

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_fma::forward
          (Convolution_x86_fma *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 (*pauVar1) [12];
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar9;
  undefined4 uVar10;
  Allocator *pAVar8;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [12];
  undefined1 auVar147 [12];
  undefined1 auVar148 [12];
  undefined1 auVar149 [12];
  undefined1 auVar150 [12];
  undefined1 auVar151 [12];
  undefined1 auVar152 [12];
  undefined1 auVar153 [12];
  undefined1 auVar154 [12];
  undefined1 auVar155 [12];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  undefined1 auVar158 [12];
  undefined1 auVar159 [12];
  undefined1 auVar160 [12];
  undefined1 auVar161 [12];
  undefined1 auVar162 [12];
  undefined1 auVar163 [12];
  undefined1 auVar164 [12];
  undefined1 auVar165 [12];
  undefined1 auVar166 [12];
  undefined1 auVar167 [12];
  undefined1 auVar168 [12];
  undefined1 auVar169 [12];
  undefined1 auVar170 [12];
  undefined1 auVar171 [12];
  undefined1 auVar172 [12];
  undefined1 auVar173 [12];
  undefined1 auVar174 [12];
  undefined1 auVar175 [12];
  undefined1 auVar176 [12];
  undefined1 auVar177 [12];
  undefined1 auVar178 [12];
  undefined1 auVar179 [12];
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  bool bVar184;
  bool bVar185;
  bool bVar186;
  int q;
  int iVar187;
  int iVar188;
  int iVar189;
  int iVar190;
  int iVar191;
  int iVar192;
  int iVar193;
  int iVar194;
  undefined1 (*pauVar195) [32];
  ulong uVar196;
  float *pfVar197;
  void *pvVar198;
  undefined1 (*pauVar199) [12];
  long lVar200;
  long lVar201;
  long lVar202;
  long lVar203;
  void *pvVar204;
  long lVar205;
  float *pfVar206;
  int iVar207;
  long lVar208;
  ulong uVar209;
  ulong uVar210;
  undefined4 uVar211;
  undefined1 (*pauVar212) [32];
  ulong uVar213;
  undefined8 *puVar214;
  long lVar215;
  long lVar216;
  long lVar217;
  long lVar218;
  long lVar219;
  int m_10;
  float fVar220;
  int iVar221;
  int *piVar222;
  int *piVar223;
  undefined8 *puVar224;
  undefined1 (*pauVar225) [16];
  undefined1 (*pauVar226) [16];
  int *piVar227;
  void *pvVar228;
  ulong uVar229;
  undefined1 auVar230 [8];
  undefined8 *puVar231;
  ulong uVar232;
  Layer *pLVar233;
  long lVar234;
  int m_8;
  undefined1 (*pauVar235) [32];
  undefined1 (*pauVar236) [32];
  int q_2;
  ulong uVar237;
  undefined1 (*pauVar238) [16];
  int j;
  int iVar239;
  undefined1 (*pauVar240) [16];
  undefined1 (*pauVar241) [32];
  int m_2;
  ulong uVar242;
  undefined1 auVar243 [8];
  int k;
  uint uVar244;
  undefined1 (*pauVar245) [32];
  float *pfVar246;
  int m_4;
  uint uVar247;
  float fVar248;
  int iVar249;
  uint uVar250;
  undefined4 *puVar252;
  undefined1 (*pauVar253) [32];
  undefined4 *puVar254;
  int *piVar255;
  long lVar256;
  int k_1;
  int iVar257;
  int iVar258;
  uint uVar259;
  undefined1 (*pauVar260) [16];
  undefined4 *puVar261;
  bool bVar262;
  bool bVar263;
  bool bVar264;
  bool bVar265;
  undefined8 uVar266;
  undefined4 extraout_XMM0_Dc;
  float sum1 [4];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined8 uVar307;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined8 uVar308;
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined8 uVar306;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float sum0 [4];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar311 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar316 [16];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [32];
  undefined1 auVar500 [32];
  undefined1 auVar501 [32];
  undefined1 auVar502 [32];
  undefined1 auVar504 [32];
  undefined1 auVar429 [16];
  undefined1 auVar505 [32];
  undefined1 auVar506 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar527 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [32];
  undefined1 auVar539 [32];
  undefined1 auVar540 [32];
  undefined1 auVar541 [32];
  undefined1 auVar542 [32];
  undefined1 auVar543 [32];
  undefined1 auVar544 [32];
  undefined1 auVar545 [32];
  undefined1 auVar546 [32];
  undefined1 auVar547 [32];
  undefined1 auVar548 [32];
  undefined1 auVar549 [32];
  undefined1 auVar550 [32];
  undefined1 auVar551 [32];
  undefined1 auVar552 [32];
  undefined1 auVar553 [32];
  undefined1 auVar554 [32];
  undefined1 auVar555 [32];
  undefined1 auVar556 [32];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar573 [32];
  undefined1 auVar574 [32];
  undefined1 auVar575 [32];
  undefined1 auVar576 [32];
  undefined1 auVar577 [32];
  undefined1 auVar578 [32];
  undefined1 auVar579 [32];
  undefined1 auVar580 [32];
  undefined1 auVar581 [32];
  undefined1 auVar582 [32];
  undefined1 auVar583 [32];
  undefined1 auVar584 [32];
  undefined1 auVar585 [32];
  undefined1 auVar586 [32];
  undefined1 auVar587 [32];
  undefined1 auVar588 [32];
  undefined1 auVar589 [32];
  undefined1 auVar590 [32];
  undefined1 auVar591 [32];
  undefined1 auVar592 [32];
  undefined1 auVar593 [32];
  undefined1 auVar594 [32];
  undefined1 auVar595 [32];
  undefined1 auVar596 [32];
  undefined1 auVar597 [32];
  undefined1 auVar598 [32];
  undefined1 auVar599 [32];
  undefined1 auVar600 [32];
  undefined1 auVar601 [32];
  undefined1 auVar602 [32];
  undefined1 auVar603 [32];
  undefined1 auVar604 [32];
  undefined1 auVar605 [32];
  undefined1 auVar606 [32];
  undefined1 auVar607 [32];
  undefined1 auVar608 [32];
  undefined1 auVar609 [32];
  undefined1 auVar610 [32];
  undefined1 auVar611 [32];
  undefined1 auVar523 [16];
  undefined1 auVar612 [32];
  undefined1 auVar526 [16];
  undefined1 auVar613 [32];
  undefined1 auVar614 [32];
  undefined1 auVar615 [32];
  undefined1 auVar528 [16];
  undefined1 auVar616 [32];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [32];
  undefined1 auVar674 [32];
  undefined1 auVar675 [32];
  undefined1 auVar676 [32];
  undefined1 auVar677 [32];
  undefined1 auVar678 [32];
  undefined1 auVar679 [32];
  undefined1 auVar680 [32];
  undefined1 auVar681 [32];
  undefined1 auVar682 [32];
  undefined1 auVar683 [32];
  undefined1 auVar684 [32];
  undefined1 auVar685 [32];
  undefined1 auVar686 [32];
  undefined1 auVar687 [32];
  undefined1 auVar688 [32];
  undefined1 auVar689 [32];
  undefined1 auVar690 [32];
  undefined1 auVar691 [32];
  undefined1 auVar692 [32];
  undefined1 auVar693 [32];
  undefined1 auVar694 [32];
  undefined1 auVar695 [32];
  undefined1 auVar696 [32];
  undefined1 auVar697 [32];
  undefined1 auVar698 [32];
  undefined1 auVar699 [32];
  undefined1 auVar700 [32];
  undefined1 auVar701 [32];
  undefined1 auVar702 [32];
  undefined1 auVar703 [32];
  undefined1 auVar704 [32];
  undefined1 auVar705 [32];
  undefined1 auVar706 [32];
  undefined1 auVar707 [32];
  undefined1 auVar708 [32];
  undefined1 auVar709 [32];
  undefined1 auVar710 [32];
  undefined1 auVar711 [32];
  undefined1 auVar712 [32];
  undefined1 auVar713 [32];
  undefined1 auVar714 [32];
  undefined1 auVar715 [32];
  undefined1 auVar716 [32];
  undefined1 auVar717 [32];
  undefined1 auVar718 [32];
  undefined1 auVar719 [32];
  undefined1 auVar720 [32];
  undefined1 auVar721 [32];
  undefined1 auVar722 [32];
  undefined1 auVar723 [32];
  undefined1 auVar724 [32];
  undefined1 auVar725 [32];
  undefined1 auVar726 [32];
  undefined1 auVar727 [32];
  undefined1 auVar728 [32];
  undefined1 auVar729 [32];
  undefined1 auVar730 [32];
  undefined1 auVar731 [32];
  undefined1 auVar732 [32];
  undefined1 auVar733 [32];
  undefined1 auVar734 [32];
  undefined1 auVar735 [32];
  undefined1 auVar736 [32];
  undefined1 auVar737 [32];
  undefined1 auVar738 [32];
  undefined1 auVar739 [32];
  undefined1 auVar740 [32];
  undefined1 auVar741 [32];
  undefined1 auVar742 [32];
  undefined1 auVar743 [32];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar745 [32];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  float fVar865;
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  float fVar864;
  float fVar866;
  float fVar867;
  float fVar868;
  undefined1 auVar805 [32];
  undefined1 auVar806 [32];
  undefined1 auVar807 [32];
  undefined1 auVar808 [32];
  undefined1 auVar809 [32];
  undefined1 auVar810 [32];
  undefined1 auVar811 [32];
  undefined1 auVar812 [32];
  undefined1 auVar813 [32];
  undefined1 auVar814 [32];
  undefined1 auVar815 [32];
  undefined1 auVar816 [32];
  undefined1 auVar817 [32];
  undefined1 auVar818 [32];
  undefined1 auVar819 [32];
  undefined1 auVar820 [32];
  undefined1 auVar821 [32];
  undefined1 auVar822 [32];
  undefined1 auVar823 [32];
  undefined1 auVar824 [32];
  undefined1 auVar825 [32];
  undefined1 auVar826 [32];
  undefined1 auVar827 [32];
  undefined1 auVar828 [32];
  undefined1 auVar829 [32];
  undefined1 auVar830 [32];
  undefined1 auVar831 [32];
  undefined1 auVar832 [32];
  undefined1 auVar833 [32];
  undefined1 auVar834 [32];
  undefined1 auVar835 [32];
  undefined1 auVar836 [32];
  undefined1 auVar837 [32];
  undefined1 auVar838 [32];
  undefined1 auVar839 [32];
  undefined1 auVar840 [32];
  undefined1 auVar841 [32];
  undefined1 auVar842 [32];
  undefined1 auVar843 [32];
  undefined1 auVar844 [32];
  undefined1 auVar845 [32];
  undefined1 auVar846 [32];
  undefined1 auVar847 [32];
  undefined1 auVar848 [32];
  undefined1 auVar849 [32];
  undefined1 auVar850 [32];
  undefined1 auVar851 [32];
  undefined1 auVar852 [32];
  undefined1 auVar853 [32];
  undefined1 auVar854 [32];
  undefined1 auVar855 [32];
  undefined1 auVar856 [32];
  undefined1 auVar857 [32];
  undefined1 auVar858 [32];
  undefined1 auVar859 [32];
  undefined1 auVar860 [32];
  undefined1 auVar861 [32];
  undefined1 auVar862 [32];
  float fVar869;
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [32];
  undefined1 auVar893 [32];
  undefined1 auVar894 [32];
  undefined1 auVar895 [32];
  undefined1 auVar896 [32];
  undefined1 auVar897 [32];
  undefined1 auVar898 [32];
  undefined1 auVar899 [32];
  undefined1 auVar900 [32];
  undefined1 auVar901 [32];
  undefined1 auVar902 [32];
  undefined1 auVar903 [32];
  undefined1 auVar904 [32];
  undefined1 auVar905 [32];
  undefined1 auVar906 [32];
  undefined1 auVar907 [32];
  undefined1 auVar908 [32];
  undefined1 auVar909 [32];
  undefined1 auVar910 [32];
  undefined1 auVar911 [32];
  undefined1 auVar912 [32];
  undefined1 auVar913 [32];
  undefined1 auVar914 [32];
  undefined1 auVar915 [32];
  undefined1 auVar916 [32];
  undefined1 auVar917 [32];
  undefined1 auVar918 [32];
  undefined1 auVar919 [32];
  undefined1 auVar920 [32];
  undefined1 auVar921 [32];
  undefined1 auVar922 [32];
  undefined1 auVar923 [32];
  undefined1 auVar924 [32];
  undefined1 auVar925 [32];
  undefined1 auVar926 [32];
  undefined1 auVar927 [32];
  undefined1 auVar928 [32];
  undefined1 auVar929 [32];
  undefined1 auVar930 [32];
  undefined1 auVar931 [32];
  undefined1 auVar932 [32];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar933 [32];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [32];
  undefined1 auVar962 [32];
  undefined1 auVar963 [32];
  undefined1 auVar964 [32];
  undefined1 auVar965 [32];
  undefined1 auVar966 [32];
  undefined1 auVar967 [32];
  undefined1 auVar968 [32];
  undefined1 auVar969 [32];
  undefined1 auVar970 [32];
  undefined1 auVar971 [32];
  undefined1 auVar972 [32];
  undefined1 auVar973 [32];
  undefined1 auVar974 [32];
  undefined1 auVar975 [32];
  undefined1 auVar976 [32];
  undefined1 auVar977 [32];
  undefined1 auVar978 [32];
  undefined1 auVar979 [32];
  undefined1 auVar980 [32];
  undefined1 auVar981 [32];
  undefined1 auVar982 [32];
  undefined1 auVar983 [32];
  undefined1 auVar984 [32];
  undefined1 auVar985 [32];
  undefined1 auVar986 [32];
  undefined1 auVar987 [32];
  undefined1 auVar988 [32];
  undefined1 auVar989 [32];
  undefined1 auVar990 [32];
  undefined1 auVar991 [32];
  undefined1 auVar992 [32];
  undefined1 auVar993 [32];
  undefined1 auVar994 [32];
  undefined1 auVar995 [32];
  undefined1 auVar996 [32];
  undefined1 auVar997 [32];
  undefined1 auVar998 [32];
  undefined1 auVar999 [32];
  undefined1 auVar1000 [32];
  undefined1 auVar1001 [32];
  undefined1 auVar1002 [32];
  undefined1 auVar1003 [32];
  undefined1 auVar1004 [32];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [32];
  undefined1 auVar1016 [32];
  undefined1 auVar1017 [32];
  undefined1 auVar1018 [32];
  undefined1 auVar1019 [32];
  undefined1 auVar1020 [32];
  undefined1 auVar1021 [32];
  undefined1 auVar1022 [32];
  undefined1 auVar1023 [32];
  undefined1 auVar1024 [32];
  undefined1 auVar1025 [32];
  undefined1 auVar1026 [32];
  undefined1 auVar1027 [32];
  undefined1 auVar1028 [32];
  undefined1 auVar1029 [32];
  undefined1 auVar1030 [32];
  undefined1 auVar1031 [32];
  undefined1 auVar1032 [32];
  undefined1 auVar1033 [32];
  undefined1 auVar1034 [32];
  undefined1 auVar1035 [32];
  undefined1 auVar1036 [32];
  undefined1 auVar1037 [32];
  undefined1 auVar1038 [32];
  undefined1 auVar1039 [32];
  undefined1 auVar1040 [32];
  undefined1 auVar1041 [32];
  undefined1 auVar1042 [32];
  undefined1 auVar1043 [32];
  undefined1 auVar1044 [32];
  undefined1 auVar1045 [32];
  undefined1 auVar1046 [32];
  undefined1 auVar1047 [32];
  undefined1 auVar1048 [32];
  undefined1 auVar1049 [32];
  undefined1 auVar1050 [32];
  undefined1 auVar1051 [32];
  undefined1 auVar1052 [32];
  undefined1 auVar1053 [32];
  undefined1 auVar1054 [32];
  undefined1 auVar1055 [32];
  undefined1 auVar1056 [32];
  undefined1 auVar1057 [32];
  undefined1 auVar1058 [32];
  undefined1 auVar1059 [64];
  undefined1 auVar1060 [64];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  undefined1 auVar1068 [16];
  undefined1 auVar1069 [16];
  undefined1 auVar1070 [16];
  undefined1 auVar1071 [16];
  undefined1 auVar1072 [16];
  undefined1 auVar1073 [16];
  undefined1 auVar1074 [16];
  undefined1 auVar1075 [16];
  undefined1 auVar1076 [16];
  undefined1 auVar1077 [16];
  undefined1 auVar1078 [16];
  undefined1 auVar1079 [16];
  undefined1 auVar1080 [16];
  undefined1 auVar1081 [16];
  undefined1 auVar1082 [16];
  undefined1 auVar1083 [16];
  undefined1 auVar1084 [16];
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [32];
  undefined1 auVar1097 [32];
  undefined1 auVar1098 [32];
  undefined1 auVar1099 [32];
  undefined1 auVar1100 [32];
  undefined1 auVar1101 [32];
  undefined1 auVar1102 [32];
  undefined1 auVar1103 [32];
  undefined1 auVar1104 [32];
  undefined1 auVar1105 [32];
  undefined1 auVar1106 [32];
  undefined1 auVar1107 [32];
  undefined1 auVar1108 [32];
  undefined1 auVar1109 [32];
  undefined1 auVar1110 [32];
  undefined1 auVar1111 [32];
  undefined1 auVar1112 [32];
  undefined1 auVar1113 [32];
  undefined1 auVar1114 [32];
  undefined1 auVar1115 [32];
  undefined1 auVar1116 [32];
  undefined1 auVar1117 [32];
  undefined1 auVar1118 [32];
  undefined1 auVar1119 [32];
  undefined1 auVar1120 [32];
  undefined1 auVar1121 [32];
  undefined1 auVar1122 [32];
  undefined1 auVar1123 [32];
  undefined1 auVar1124 [32];
  undefined1 auVar1125 [32];
  undefined1 auVar1126 [32];
  undefined1 auVar1127 [32];
  undefined1 auVar1128 [32];
  undefined1 auVar1129 [64];
  undefined1 auVar1130 [64];
  undefined1 auVar1131 [16];
  undefined1 auVar1132 [16];
  undefined1 auVar1133 [16];
  undefined1 auVar1134 [16];
  undefined1 auVar1135 [16];
  undefined1 auVar1136 [16];
  undefined1 auVar1137 [16];
  undefined1 auVar1138 [16];
  undefined1 auVar1139 [16];
  undefined1 auVar1140 [16];
  undefined1 auVar1141 [16];
  undefined1 auVar1142 [16];
  undefined1 auVar1143 [16];
  undefined1 auVar1144 [16];
  undefined1 auVar1145 [16];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1159 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [32];
  undefined1 auVar1172 [32];
  undefined1 auVar1173 [32];
  undefined1 auVar1174 [32];
  undefined1 auVar1175 [32];
  undefined1 auVar1176 [32];
  undefined1 auVar1177 [32];
  undefined1 auVar1178 [32];
  undefined1 auVar1179 [32];
  undefined1 auVar1180 [32];
  undefined1 auVar1181 [32];
  undefined1 auVar1182 [32];
  undefined1 auVar1183 [32];
  undefined1 auVar1184 [32];
  undefined1 auVar1185 [32];
  undefined1 auVar1186 [32];
  undefined1 auVar1187 [32];
  undefined1 auVar1188 [32];
  undefined1 auVar1189 [32];
  undefined1 auVar1190 [32];
  undefined1 auVar1191 [32];
  undefined1 auVar1192 [32];
  undefined1 auVar1193 [32];
  undefined1 auVar1194 [32];
  undefined1 auVar1195 [32];
  undefined1 auVar1196 [32];
  undefined1 auVar1197 [32];
  undefined1 auVar1198 [32];
  undefined1 auVar1199 [32];
  undefined1 auVar1200 [32];
  undefined1 auVar1201 [32];
  undefined1 auVar1202 [32];
  undefined1 auVar1203 [32];
  undefined1 auVar1204 [32];
  undefined1 auVar1205 [32];
  undefined1 auVar1206 [32];
  undefined1 auVar1207 [32];
  undefined1 auVar1208 [32];
  undefined1 auVar1209 [32];
  undefined1 auVar1210 [32];
  undefined1 auVar1211 [32];
  undefined1 auVar1212 [32];
  undefined1 auVar1213 [32];
  undefined1 auVar1214 [32];
  undefined1 auVar1215 [32];
  undefined1 auVar1168 [16];
  undefined1 auVar1216 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar1217 [64];
  undefined1 auVar1218 [64];
  undefined1 auVar1219 [16];
  undefined1 auVar1260 [16];
  undefined1 auVar1261 [16];
  undefined1 auVar1262 [16];
  undefined1 auVar1263 [16];
  undefined1 auVar1264 [32];
  undefined1 auVar1265 [32];
  undefined1 auVar1266 [32];
  undefined1 auVar1267 [32];
  undefined1 auVar1268 [32];
  undefined1 auVar1269 [32];
  undefined1 auVar1270 [32];
  undefined1 auVar1271 [32];
  undefined1 auVar1272 [32];
  undefined1 auVar1273 [32];
  undefined1 auVar1274 [32];
  undefined1 auVar1275 [32];
  undefined1 auVar1276 [32];
  undefined1 auVar1277 [32];
  undefined1 auVar1278 [32];
  undefined1 auVar1279 [32];
  undefined1 auVar1280 [32];
  undefined1 auVar1281 [32];
  undefined1 auVar1282 [32];
  undefined1 auVar1283 [32];
  undefined1 auVar1284 [32];
  undefined1 auVar1285 [32];
  undefined1 auVar1286 [32];
  undefined1 auVar1287 [32];
  undefined1 auVar1288 [32];
  undefined1 auVar1289 [32];
  undefined1 auVar1290 [32];
  undefined1 auVar1291 [32];
  undefined1 auVar1292 [32];
  undefined1 auVar1293 [32];
  undefined1 auVar1294 [32];
  undefined1 auVar1295 [32];
  undefined1 auVar1296 [32];
  undefined1 auVar1297 [32];
  undefined1 auVar1298 [32];
  undefined1 auVar1299 [32];
  undefined1 auVar1300 [32];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 auVar1226 [16];
  undefined1 auVar1227 [16];
  undefined1 auVar1228 [16];
  undefined1 auVar1229 [16];
  undefined1 auVar1230 [16];
  undefined1 auVar1231 [16];
  undefined1 auVar1232 [16];
  undefined1 auVar1233 [16];
  undefined1 auVar1234 [16];
  undefined1 auVar1235 [16];
  undefined1 auVar1236 [16];
  undefined1 auVar1237 [16];
  undefined1 auVar1238 [16];
  undefined1 auVar1239 [16];
  undefined1 auVar1240 [16];
  undefined1 auVar1241 [16];
  undefined1 auVar1242 [16];
  undefined1 auVar1243 [16];
  undefined1 auVar1244 [16];
  undefined1 auVar1245 [16];
  undefined1 auVar1246 [16];
  undefined1 auVar1247 [16];
  undefined1 auVar1248 [16];
  undefined1 auVar1249 [16];
  undefined1 auVar1250 [16];
  undefined1 auVar1251 [16];
  undefined1 auVar1252 [16];
  undefined1 auVar1253 [16];
  undefined1 auVar1254 [16];
  undefined1 auVar1255 [16];
  undefined1 auVar1256 [16];
  undefined1 auVar1257 [16];
  undefined1 auVar1258 [16];
  undefined1 auVar1301 [32];
  undefined1 auVar1259 [16];
  undefined1 auVar1302 [32];
  undefined1 auVar1303 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar1304 [64];
  undefined1 auVar1305 [64];
  __m128 pos;
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [32];
  undefined1 auVar1338 [32];
  undefined1 auVar1339 [32];
  undefined1 auVar1340 [32];
  undefined1 auVar1341 [32];
  undefined1 auVar1342 [32];
  undefined1 auVar1343 [32];
  undefined1 auVar1344 [32];
  undefined1 auVar1345 [32];
  undefined1 auVar1346 [32];
  undefined1 auVar1347 [32];
  undefined1 auVar1348 [32];
  undefined1 auVar1349 [32];
  undefined1 auVar1350 [32];
  undefined1 auVar1351 [32];
  undefined1 auVar1352 [32];
  undefined1 auVar1353 [32];
  undefined1 auVar1354 [32];
  undefined1 auVar1355 [32];
  undefined1 auVar1356 [32];
  undefined1 auVar1357 [32];
  undefined1 auVar1358 [32];
  undefined1 auVar1359 [32];
  undefined1 auVar1360 [32];
  undefined1 auVar1361 [32];
  undefined1 auVar1362 [32];
  undefined1 auVar1363 [32];
  undefined1 auVar1364 [32];
  undefined1 auVar1365 [32];
  undefined1 auVar1366 [32];
  undefined1 auVar1367 [32];
  undefined1 auVar1368 [32];
  undefined1 auVar1306 [16];
  undefined1 auVar1307 [16];
  undefined1 auVar1308 [16];
  undefined1 auVar1309 [16];
  undefined1 auVar1310 [16];
  undefined1 auVar1311 [16];
  undefined1 auVar1312 [16];
  undefined1 auVar1313 [16];
  undefined1 auVar1314 [16];
  undefined1 auVar1315 [16];
  undefined1 auVar1316 [16];
  undefined1 auVar1317 [16];
  undefined1 auVar1318 [16];
  undefined1 auVar1319 [16];
  undefined1 auVar1320 [16];
  undefined1 auVar1321 [16];
  undefined1 auVar1322 [16];
  undefined1 auVar1323 [16];
  undefined1 auVar1324 [16];
  undefined1 auVar1325 [16];
  undefined1 auVar1326 [16];
  undefined1 auVar1327 [16];
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1369 [32];
  undefined1 auVar1370 [32];
  undefined1 auVar1371 [32];
  undefined1 auVar1372 [32];
  undefined1 auVar1373 [32];
  undefined1 auVar1374 [32];
  undefined1 auVar1375 [32];
  undefined1 auVar1376 [32];
  undefined1 auVar1377 [32];
  undefined1 auVar1378 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar1379 [64];
  undefined1 auVar1380 [16];
  undefined1 auVar1406 [16];
  undefined1 auVar1407 [16];
  undefined1 auVar1408 [32];
  undefined1 auVar1409 [32];
  undefined1 auVar1410 [32];
  undefined1 auVar1411 [32];
  undefined1 auVar1412 [32];
  undefined1 auVar1413 [32];
  undefined1 auVar1414 [32];
  undefined1 auVar1415 [32];
  undefined1 auVar1416 [32];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1417 [32];
  undefined1 auVar1418 [32];
  undefined1 auVar1419 [32];
  undefined1 auVar1420 [32];
  undefined1 auVar1421 [32];
  undefined1 auVar1422 [32];
  undefined1 auVar1423 [32];
  undefined1 auVar1424 [32];
  undefined1 auVar1425 [32];
  undefined1 auVar1426 [32];
  undefined1 auVar1427 [32];
  undefined1 auVar1428 [32];
  undefined1 auVar1429 [32];
  undefined1 auVar1430 [32];
  undefined1 auVar1431 [32];
  undefined1 auVar1432 [32];
  undefined1 auVar1433 [32];
  undefined1 auVar1434 [32];
  undefined1 auVar1435 [32];
  undefined1 auVar1436 [32];
  undefined1 auVar1437 [32];
  undefined1 auVar1438 [32];
  undefined1 auVar1439 [32];
  undefined1 auVar1440 [32];
  undefined1 auVar1441 [32];
  undefined1 auVar1442 [32];
  undefined1 auVar1443 [32];
  undefined1 auVar1444 [32];
  undefined1 auVar1445 [32];
  undefined1 auVar1446 [32];
  undefined1 auVar1447 [32];
  undefined1 auVar1448 [32];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [16];
  undefined1 auVar1404 [16];
  undefined1 auVar1405 [16];
  undefined1 auVar1449 [32];
  undefined1 auVar1450 [32];
  undefined1 auVar1451 [32];
  undefined1 auVar1452 [64];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [16];
  undefined1 auVar1458 [16];
  undefined1 auVar1459 [16];
  undefined1 auVar1460 [16];
  undefined1 auVar1461 [16];
  undefined1 auVar1462 [16];
  undefined1 auVar1463 [16];
  undefined1 auVar1464 [16];
  undefined1 auVar1465 [16];
  undefined1 auVar1466 [16];
  undefined1 auVar1467 [16];
  undefined1 auVar1468 [16];
  undefined1 auVar1469 [16];
  undefined1 auVar1470 [16];
  undefined1 auVar1471 [32];
  undefined1 auVar1472 [32];
  undefined1 auVar1473 [32];
  undefined1 auVar1474 [32];
  undefined1 auVar1475 [32];
  undefined1 auVar1476 [32];
  undefined1 auVar1477 [32];
  undefined1 auVar1478 [32];
  undefined1 auVar1479 [32];
  undefined1 auVar1480 [32];
  undefined1 auVar1481 [32];
  undefined1 auVar1482 [32];
  undefined1 auVar1483 [32];
  undefined1 auVar1484 [32];
  undefined1 auVar1485 [32];
  undefined1 auVar1486 [32];
  undefined1 auVar1487 [32];
  undefined1 auVar1488 [64];
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [32];
  undefined1 auVar1497 [32];
  undefined1 auVar1498 [32];
  undefined1 auVar1499 [32];
  undefined1 auVar1500 [32];
  undefined1 auVar1501 [32];
  undefined1 auVar1502 [32];
  undefined1 auVar1503 [32];
  undefined1 auVar1504 [32];
  undefined1 auVar1505 [32];
  undefined1 auVar1506 [64];
  int TILE_N;
  int TILE_M;
  int TILE_K;
  Mat m;
  Mat m_1;
  int TILE_K_3;
  float tmp [2] [4] [8];
  int in_stack_fffffffffffff440;
  undefined1 (*local_b88) [32];
  int local_b80;
  undefined4 uStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  undefined4 *local_b58;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined1 (*local_b08) [32];
  int local_ae0;
  undefined4 uStack_ad4;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined1 local_ab0 [16];
  uint local_a88;
  int local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  void *local_9c8;
  undefined1 local_9c0 [12];
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  void *local_928;
  Mat local_920;
  void *local_8d8;
  undefined1 local_8d0 [8];
  float fStack_8c8;
  undefined4 uStack_8c4;
  byte local_8c0;
  undefined7 uStack_8bf;
  float local_8b8;
  Allocator *local_8b0;
  int iStack_8a8;
  float fStack_8a4;
  float fStack_8a0;
  int iStack_89c;
  int iStack_898;
  size_t local_890;
  undefined1 local_880 [32];
  void *local_858;
  void *local_850;
  int local_844;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  ulong local_818;
  Mat local_810;
  undefined1 local_7c0 [32];
  void *local_798;
  ulong local_790;
  void *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  int local_760;
  int iStack_75c;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  Mat local_738;
  undefined1 local_6f0 [16];
  undefined1 (*local_6e0) [32];
  ulong local_6d8;
  ulong local_6d0;
  ulong local_6c8;
  int local_6c0;
  int local_6bc;
  Mat local_6b8;
  ulong local_670;
  ulong local_668;
  undefined1 local_660 [8];
  float afStack_658 [2];
  undefined8 uStack_650;
  float afStack_648 [2];
  Allocator *local_640;
  int iStack_638;
  float fStack_634;
  float fStack_630;
  int iStack_62c;
  int iStack_628;
  float fStack_624;
  size_t local_620;
  float afStack_618 [6];
  float local_600 [8];
  float local_5e0 [4];
  undefined8 auStack_5d0 [2];
  float local_5c0 [8];
  float local_5a0 [8];
  float local_580 [8];
  undefined8 auStack_560 [4];
  undefined1 auStack_540 [32];
  undefined8 auStack_520 [8];
  undefined8 auStack_4e0 [16];
  undefined1 auStack_460 [64];
  undefined1 auStack_420 [64];
  undefined1 auStack_3e0 [128];
  undefined1 auStack_360 [256];
  undefined1 auStack_260 [256];
  undefined1 auStack_160 [256];
  undefined1 auStack_60 [48];
  void *pvVar251;
  undefined1 auVar392 [32];
  undefined1 auVar396 [32];
  undefined1 auVar399 [32];
  undefined1 auVar493 [32];
  undefined1 auVar503 [32];
  undefined1 auVar507 [32];
  undefined1 auVar617 [32];
  undefined1 auVar744 [32];
  undefined1 auVar746 [32];
  undefined1 auVar863 [32];
  undefined1 auVar934 [32];
  
  sum0 = in_ZMM1._0_16_;
  auVar268 = in_ZMM2._0_16_;
  if ((opt->use_int8_inference == true) && ((this->super_Convolution).int8_scale_term != 0)) {
    iVar187 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar187;
  }
  iVar187 = (this->super_Convolution).kernel_w;
  iVar257 = (this->super_Convolution).kernel_h;
  if (iVar257 != 1 || (iVar187 != 1 || bottom_blob->dims != 1)) {
    iVar188 = bottom_blob->c;
    uVar210 = bottom_blob->elemsize;
    iVar239 = bottom_blob->elempack;
    iVar258 = (this->super_Convolution).dilation_w;
    iVar249 = (this->super_Convolution).dilation_h;
    local_920.cstep = 0;
    local_920.data = (int *)0x0;
    local_920.refcount._0_4_ = 0;
    local_920.refcount._4_4_ = 0;
    local_920.elemsize = 0;
    local_920.elempack = 0;
    local_920.allocator = (Allocator *)0x0;
    local_920.dims = 0;
    local_920.w = 0;
    local_920.h = 0;
    local_920.d = 0;
    local_920.c = 0;
    Convolution::make_padding(&this->super_Convolution,bottom_blob,&local_920,opt);
    iVar192 = local_920.w;
    iVar189 = -100;
    local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
    local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60);
    local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
    local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
    local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20);
    local_780 = CONCAT44(local_780._4_4_,(int)local_780);
    if (((int *)local_920.data != (int *)0x0) &&
       (local_840 = CONCAT44(local_840._4_4_,(uint)local_840),
       local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60),
       local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40),
       local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80),
       local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20),
       local_780 = CONCAT44(local_780._4_4_,(int)local_780),
       (long)local_920.c * local_920.cstep != 0)) {
      iVar187 = (~((iVar187 + -1) * iVar258) + local_920.w) / (this->super_Convolution).stride_w + 1
      ;
      local_a40._0_4_ = (float)local_920.h;
      iVar257 = (~((iVar257 + -1) * iVar249) + local_920.h) / (this->super_Convolution).stride_h + 1
      ;
      uVar259 = (this->super_Convolution).num_output;
      if (opt->use_packing_layout == true) {
        lVar200 = (ulong)((uVar259 & 3) == 0) * 3 + 1;
        if ((uVar259 & 7) == 0) {
          lVar200 = 8;
        }
      }
      else {
        lVar200 = 1;
      }
      iVar258 = (int)lVar200;
      Mat::create(top_blob,iVar187,iVar257,(int)uVar259 / iVar258,
                  lVar200 * (uVar210 / (ulong)(long)iVar239),iVar258,opt->blob_allocator);
      fVar248 = (float)local_a40;
      local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
      local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60);
      local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
      local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
      local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20);
      local_780 = CONCAT44(local_780._4_4_,(int)local_780);
      if ((top_blob->data != (void *)0x0) &&
         (local_840 = CONCAT44(local_840._4_4_,(uint)local_840),
         local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60),
         local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40),
         local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80),
         local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20),
         local_780 = CONCAT44(local_780._4_4_,(int)local_780),
         (long)top_blob->c * top_blob->cstep != 0)) {
        if (((opt->use_packing_layout == false) &&
            ((((((this->super_Convolution).kernel_w == (this->super_Convolution).kernel_h &&
                (iVar249 = (this->super_Convolution).dilation_w, iVar249 != 1)) &&
               (iVar189 = (this->super_Convolution).dilation_h, iVar189 == iVar249)) &&
              (((this->super_Convolution).stride_w == 1 && ((this->super_Convolution).stride_h == 1)
               ))) && (iVar249 <= iVar187)))) && (iVar189 <= iVar257)) {
          iVar189 = forwardDilation_x86(this,&local_920,top_blob,opt);
          local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
          local_780 = CONCAT44(local_780._4_4_,(int)local_780);
        }
        else {
          iVar188 = iVar188 * iVar239;
          bVar186 = opt->use_winograd23_convolution;
          if (((bVar186 == false) && (opt->use_winograd43_convolution == false)) &&
             (opt->use_winograd63_convolution != true)) {
            bVar184 = false;
          }
          else {
            bVar184 = true;
            if (iVar188 < 9) {
              bVar184 = 8 < (this->super_Convolution).num_output;
            }
          }
          auVar310._0_4_ = (this->super_Convolution).kernel_w;
          auVar310._4_4_ = (this->super_Convolution).kernel_h;
          auVar310._8_4_ = (this->super_Convolution).dilation_w;
          auVar310._12_4_ = (this->super_Convolution).dilation_h;
          if ((((auVar310 == _DAT_005352c0) && ((this->super_Convolution).stride_w == 1)) &&
              ((this->super_Convolution).stride_h == 1)) &&
             ((opt->use_winograd_convolution != false && (bVar184)))) {
            iVar187 = (this->super_Convolution).num_output;
            bVar184 = test_prefer_winograd63(iVar188,iVar187,iVar192,(int)(float)local_a40);
            bVar185 = test_prefer_winograd23(iVar188,iVar187,iVar192,(int)fVar248);
            if ((bVar185) &&
               (((bVar186 == false || ((this->weight_winograd23_data).data == (void *)0x0)) ||
                ((long)(this->weight_winograd23_data).c * (this->weight_winograd23_data).cstep == 0)
                ))) {
              bVar186 = true;
              bVar185 = false;
              bVar262 = false;
              if (bVar184) {
LAB_001b9840:
                bVar262 = false;
                if (((opt->use_winograd63_convolution != true) ||
                    ((this->weight_winograd63_data).data == (void *)0x0)) ||
                   (bVar184 = (long)(this->weight_winograd63_data).c *
                              (this->weight_winograd63_data).cstep == 0, bVar262 = !bVar184,
                   bVar186 || bVar184)) goto LAB_001b9886;
LAB_001b98ef:
                bVar262 = true;
              }
              else {
LAB_001b9886:
                if (((opt->use_winograd43_convolution == true) &&
                    ((this->weight_winograd43_data).data != (void *)0x0)) &&
                   (bVar186 = true,
                   (long)(this->weight_winograd43_data).c * (this->weight_winograd43_data).cstep !=
                   0)) goto LAB_001b98f9;
                if (((opt->use_winograd63_convolution == true) &&
                    ((this->weight_winograd63_data).data != (void *)0x0)) &&
                   ((long)(this->weight_winograd63_data).c * (this->weight_winograd63_data).cstep !=
                    0)) goto LAB_001b98ef;
                bVar185 = true;
              }
              bVar186 = false;
            }
            else {
              if (bVar184) {
                bVar186 = !bVar185 && !bVar184;
                goto LAB_001b9840;
              }
              bVar262 = false;
              bVar186 = false;
              if (!bVar185 && !bVar184) goto LAB_001b9886;
            }
LAB_001b98f9:
            fVar248 = (float)this->nT;
            fVar220 = fVar248;
            if (fVar248 == 0.0) {
              fVar220 = (float)opt->num_threads;
            }
            if ((float)opt->num_threads != fVar248 && fVar248 != 0.0) {
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution winograd will use load-time value %d"
                     );
              fputc(10,_stderr);
            }
            local_a80._4_4_ = 0;
            local_a80._0_4_ = fVar220;
            if (bVar185 == false) {
              if (bVar186) {
                uVar7 = top_blob->w;
                uVar10 = top_blob->h;
                auVar269._4_4_ = uVar10;
                auVar269._0_4_ = uVar7;
                auVar311._8_4_ = 3;
                auVar311._0_8_ = 0x300000003;
                auVar311._12_4_ = 3;
                auVar269._8_8_ = 0;
                auVar268 = vpaddd_avx(auVar269,auVar311);
                auVar310 = vpsrad_avx(auVar268,0x1f);
                auVar310 = vpsrld_avx(auVar310,0x1e);
                auVar268 = vpaddd_avx(auVar268,auVar310);
                auVar268 = vpsrad_avx(auVar268,2);
                uVar250 = top_blob->elempack * top_blob->c;
                uVar209 = (ulong)uVar250;
                uVar247 = auVar268._4_4_ * auVar268._0_4_;
                uVar210 = (ulong)uVar247;
                uVar244 = local_920.elempack * local_920.c;
                pvVar204 = (void *)(ulong)uVar244;
                get_optimal_tile_mnk
                          (uVar250,uVar247,uVar244,&local_a84,(int *)&local_a88,&local_844,
                           (int)fVar220);
                iVar187 = local_844;
                uVar259 = local_a88;
                local_798 = (void *)((long)(int)(local_a84 + uVar250 + -1) / (long)local_a84 &
                                    0xffffffff);
                iVar188 = (int)(uVar247 + local_a88 + -1) / (int)local_a88;
                iVar239 = (int)(uVar244 + local_844 + -1) / local_844;
                local_890 = 0;
                iVar257 = local_844 * local_a88;
                local_8d0 = (undefined1  [8])0x0;
                fStack_8c8 = 0.0;
                uStack_8c4 = 0;
                local_8c0 = 0;
                uStack_8bf = 0;
                local_8b8 = 0.0;
                local_8b0 = (Allocator *)0x0;
                iStack_8a8 = 0;
                fStack_8a4 = 0.0;
                fStack_8a0 = 0.0;
                iStack_89c = 0;
                iStack_898 = 0;
                Mat::create((Mat *)local_8d0,iVar257,0x24,iVar239,iVar188,4,opt->workspace_allocator
                           );
                lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                iVar189 = -100;
                local_928 = pvVar204;
                local_790 = uVar210;
                local_6d0 = uVar209;
                if ((local_8d0 != (undefined1  [8])0x0) && ((long)iStack_898 * local_890 != 0)) {
                  fVar248 = (float)(iVar188 * iVar239);
                  iVar257 = iVar257 * 0x24;
                  if (((int)(float)local_a80 < 2) || ((int)(float)local_a80 <= (int)fVar248)) {
                    local_620 = 0;
                    local_660 = (undefined1  [8])0x0;
                    afStack_658[0] = 0.0;
                    afStack_658[1] = 0.0;
                    uStack_650 = (pointer)0x0;
                    afStack_648[0] = 0.0;
                    local_640 = (Allocator *)0x0;
                    iStack_638 = 0;
                    fStack_634 = 0.0;
                    fStack_630 = 0.0;
                    iStack_62c = 0;
                    iStack_628 = 0;
                    Mat::create((Mat *)local_660,iVar257,1,(int)(float)local_a80,4,
                                opt->workspace_allocator);
                    if ((local_660 != (undefined1  [8])0x0) && ((long)iStack_628 * local_620 != 0))
                    {
                      fVar220 = 0.0;
                      if ((int)fVar248 < 1) {
                        fVar248 = fVar220;
                      }
                      while (fVar248 != fVar220) {
                        local_a40._4_4_ = 0;
                        local_a60._0_4_ = (float)((int)fVar220 % iVar239);
                        iVar257 = ((int)fVar220 / iVar239) * uVar259;
                        iVar188 = (int)(float)local_a60 * iVar187;
                        uVar244 = (int)local_790 - iVar257;
                        if ((int)uVar259 < (int)uVar244) {
                          uVar244 = uVar259;
                        }
                        iVar258 = (int)local_928 - iVar188;
                        if (iVar187 < iVar258) {
                          iVar258 = iVar187;
                        }
                        local_a40._0_4_ = fVar220;
                        iVar249 = get_omp_thread_num();
                        local_810.data =
                             (void *)((long)iVar249 * local_620 * (long)uStack_650 + (long)local_660
                                     );
                        local_810.refcount._0_4_ = 0;
                        local_810.refcount._4_4_ = 0;
                        local_810.elemsize = (size_t)uStack_650;
                        local_810.elempack = (int)afStack_648[0];
                        local_810.allocator = local_640;
                        local_810.w = (int)fStack_634;
                        local_810.h = (int)fStack_630;
                        local_810.d = 1;
                        local_810.c = iStack_62c;
                        local_810.dims = iStack_638 + -1;
                        local_810.cstep =
                             ((long)uStack_650 * (long)(int)fStack_630 * (long)(int)fStack_634 +
                              0xfU & 0xfffffffffffffff0) / (ulong)uStack_650;
                        if (iStack_638 == 4) {
                          local_810.cstep = (long)(int)fStack_630 * (long)(int)fStack_634;
                        }
                        conv3x3s1_winograd43_transform_input_tile
                                  (&local_920,&local_810,iVar257,uVar244,iVar188,iVar258,
                                   in_stack_fffffffffffff440);
                        local_738.elemsize = CONCAT71(uStack_8bf,local_8c0);
                        local_738.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                        local_738.data =
                             (void *)((long)local_8d0 +
                                     (uint)(float)local_a60 * local_738.elemsize * local_738.cstep +
                                     (long)((int)fVar220 / iVar239) * local_890 * local_738.elemsize
                                     );
                        local_738.refcount = (int *)0x0;
                        local_738.elempack = (int)local_8b8;
                        local_738.allocator = local_8b0;
                        local_738.dims = 2;
                        local_738.w = (int)fStack_8a4;
                        local_738.h = (int)fStack_8a0;
                        local_738.d = 1;
                        local_738.c = 1;
                        transpose_pack_B_tile
                                  (&local_810,&local_738,0x24,uVar244,iVar258,(int)local_738.cstep);
                        fVar220 = (float)((int)(float)local_a40 + 1);
                      }
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          if (local_640 == (Allocator *)0x0) goto LAB_001c782e;
                          (*local_640->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_001c7836;
                    }
                    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                    lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                    lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      lVar200 = local_a40;
                      lVar208 = local_780;
                      if (*piVar255 == 0) {
                        auVar230 = local_660;
                        if (local_640 == (Allocator *)0x0) goto LAB_001c8fc5;
                        (*local_640->_vptr_Allocator[3])();
                        lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                        lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                      }
                    }
                  }
                  else {
                    local_620 = 0;
                    local_660 = (undefined1  [8])0x0;
                    afStack_658[0] = 0.0;
                    afStack_658[1] = 0.0;
                    uStack_650 = (pointer)0x0;
                    afStack_648[0] = 0.0;
                    local_640 = (Allocator *)0x0;
                    iStack_638 = 0;
                    fStack_634 = 0.0;
                    fStack_630 = 0.0;
                    iStack_62c = 0;
                    iStack_628 = 0;
                    Mat::create((Mat *)local_660,iVar257,4,opt->workspace_allocator);
                    if ((local_660 == (undefined1  [8])0x0) || ((long)iStack_628 * local_620 == 0))
                    {
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                      lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        lVar200 = local_a40;
                        lVar208 = local_780;
                        if (*piVar255 == 0) {
                          auVar230 = local_660;
                          if (local_640 == (Allocator *)0x0) goto LAB_001c8fc5;
                          (*local_640->_vptr_Allocator[3])();
                          lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                          lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                        }
                      }
                    }
                    else {
                      fVar220 = 0.0;
                      if ((int)fVar248 < 1) {
                        fVar248 = fVar220;
                      }
                      for (; fVar248 != fVar220; fVar220 = (float)((int)fVar220 + 1)) {
                        iVar257 = ((int)fVar220 / iVar239) * uVar259;
                        iVar188 = (int)((long)(int)fVar220 % (long)iVar239) * iVar187;
                        uVar244 = (int)local_790 - iVar257;
                        if ((int)uVar259 < (int)uVar244) {
                          uVar244 = uVar259;
                        }
                        iVar258 = (int)local_928 - iVar188;
                        if (iVar187 < iVar258) {
                          iVar258 = iVar187;
                        }
                        conv3x3s1_winograd43_transform_input_tile
                                  (&local_920,(Mat *)local_660,iVar257,uVar244,iVar188,iVar258,
                                   in_stack_fffffffffffff440);
                        local_810.elemsize = CONCAT71(uStack_8bf,local_8c0);
                        local_810.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                        local_810.data =
                             (void *)((long)local_8d0 +
                                     ((long)(int)fVar220 % (long)iVar239 & 0xffffffffU) *
                                     local_810.elemsize * local_810.cstep +
                                     (long)((int)fVar220 / iVar239) * local_890 * local_810.elemsize
                                     );
                        local_810.refcount._0_4_ = 0;
                        local_810.refcount._4_4_ = 0;
                        local_810.elempack = (int)local_8b8;
                        local_810.allocator = local_8b0;
                        local_810.dims = 2;
                        local_810.w = (int)fStack_8a4;
                        local_810.h = (int)fStack_8a0;
                        local_810.d = 1;
                        local_810.c = 1;
                        transpose_pack_B_tile
                                  ((Mat *)local_660,&local_810,0x24,uVar244,iVar258,
                                   (int)local_810.cstep);
                      }
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          if (local_640 == (Allocator *)0x0) {
LAB_001c782e:
                            free((void *)local_660);
                          }
                          else {
                            (*local_640->_vptr_Allocator[3])();
                          }
                        }
                      }
LAB_001c7836:
                      local_810.cstep = 0;
                      local_810.data._0_4_ = 0;
                      local_810.data._4_4_ = 0;
                      local_810.refcount._0_4_ = 0;
                      local_810.refcount._4_4_ = 0;
                      local_810.elemsize = 0;
                      local_810.elempack = 0;
                      local_810.allocator = (Allocator *)0x0;
                      local_810.dims = 0;
                      local_810.w = 0;
                      local_810.h = 0;
                      local_810.d = 0;
                      local_810.c = 0;
                      Mat::create(&local_810,local_a88 * local_a84 * 0x24,1,(int)(float)local_a80,4,
                                  opt->workspace_allocator);
                      iVar189 = -100;
                      if ((CONCAT44(local_810.data._4_4_,(int)local_810.data) != 0) &&
                         ((long)local_810.c * local_810.cstep != 0)) {
                        iVar187 = (int)local_798;
                        local_798 = (void *)((ulong)local_798 & 0xffffffff);
                        if (iVar187 < 1) {
                          local_798 = (void *)0x0;
                        }
                        pvVar204 = (void *)0x0;
                        while (iVar187 = local_a84, iVar189 = 0, pvVar204 != local_798) {
                          local_858 = pvVar204;
                          iVar257 = get_omp_thread_num();
                          local_738.data =
                               (void *)((long)iVar257 * local_810.cstep * local_810.elemsize +
                                       CONCAT44(local_810.data._4_4_,(int)local_810.data));
                          local_738.refcount = (int *)0x0;
                          local_738.elemsize = local_810.elemsize;
                          local_738.elempack = local_810.elempack;
                          local_738.allocator = local_810.allocator;
                          local_738.w = local_810.w;
                          local_738.h = local_810.h;
                          local_738.c = local_810.d;
                          local_738.d = 1;
                          local_738.dims = local_810.dims + -1;
                          local_738.cstep =
                               (local_810.elemsize * (long)local_810.h * (long)local_810.w + 0xf &
                               0xfffffffffffffff0) / local_810.elemsize;
                          if (local_810.dims == 4) {
                            local_738.cstep = (long)local_810.h * (long)local_810.w;
                          }
                          iVar188 = iVar187 * (int)local_858;
                          iVar257 = (int)local_6d0 - iVar188;
                          if (iVar187 < iVar257) {
                            iVar257 = iVar187;
                          }
                          lVar208 = (long)iVar188;
                          local_6e0 = (undefined1 (*) [32])CONCAT44(local_6e0._4_4_,iVar257);
                          lVar200 = (long)iVar257;
                          auVar1218 = ZEXT3264(CONCAT428(0x3f3504f3,
                                                         CONCAT424(0x3f3504f3,
                                                                   CONCAT420(0x3f3504f3,
                                                                             CONCAT416(0x3f3504f3,
                                                                                       CONCAT412(
                                                  0x3f3504f3,CONCAT48(0x3f3504f3,0x3f3504f33f3504f3)
                                                  ))))));
                          auVar1305 = ZEXT3264(CONCAT428(0x3fb504f3,
                                                         CONCAT424(0x3fb504f3,
                                                                   CONCAT420(0x3fb504f3,
                                                                             CONCAT416(0x3fb504f3,
                                                                                       CONCAT412(
                                                  0x3fb504f3,CONCAT48(0x3fb504f3,0x3fb504f33fb504f3)
                                                  ))))));
                          auVar1379 = ZEXT3264(CONCAT428(0x3f000000,
                                                         CONCAT424(0x3f000000,
                                                                   CONCAT420(0x3f000000,
                                                                             CONCAT416(0x3f000000,
                                                                                       CONCAT412(
                                                  0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)
                                                  ))))));
                          auVar1452 = ZEXT3264(CONCAT428(0x40000000,
                                                         CONCAT424(0x40000000,
                                                                   CONCAT420(0x40000000,
                                                                             CONCAT416(0x40000000,
                                                                                       CONCAT412(
                                                  0x40000000,CONCAT48(0x40000000,0x4000000040000000)
                                                  ))))));
                          auVar1488 = ZEXT3264(CONCAT428(0x3eb504f3,
                                                         CONCAT424(0x3eb504f3,
                                                                   CONCAT420(0x3eb504f3,
                                                                             CONCAT416(0x3eb504f3,
                                                                                       CONCAT412(
                                                  0x3eb504f3,CONCAT48(0x3eb504f3,0x3eb504f33eb504f3)
                                                  ))))));
                          auVar1506 = ZEXT3264(CONCAT428(0x403504f3,
                                                         CONCAT424(0x403504f3,
                                                                   CONCAT420(0x403504f3,
                                                                             CONCAT416(0x403504f3,
                                                                                       CONCAT412(
                                                  0x403504f3,CONCAT48(0x403504f3,0x403504f3403504f3)
                                                  ))))));
                          auVar1060 = ZEXT1664(CONCAT412(0x3f3504f3,
                                                         CONCAT48(0x3f3504f3,0x3f3504f33f3504f3)));
                          auVar1130 = ZEXT1664(CONCAT412(0x3fb504f3,
                                                         CONCAT48(0x3fb504f3,0x3fb504f33fb504f3)));
                          uVar210 = 0;
                          while (auVar268 = local_6f0, iVar187 = local_844,
                                uVar259 = (int)local_790 - (int)uVar210,
                                uVar259 != 0 && (int)uVar210 <= (int)local_790) {
                            local_980._0_8_ = uVar210;
                            local_8d8 = (void *)CONCAT44(local_8d8._4_4_,local_a88);
                            if ((int)local_a88 < (int)uVar259) {
                              uVar259 = local_a88;
                            }
                            local_6f0._4_4_ = 0;
                            local_6f0._0_4_ = uVar259;
                            local_6f0._8_8_ = auVar268._8_8_;
                            iVar257 = 0;
                            uVar210 = (ulong)local_928 & 0xffffffff;
                            while( true ) {
                              iVar249 = (int)uVar210;
                              iVar258 = local_6f0._0_4_;
                              iVar239 = local_980._0_4_;
                              if ((int)local_928 <= iVar257) break;
                              iVar189 = iVar249;
                              if (iVar187 < iVar249) {
                                iVar189 = iVar187;
                              }
                              fStack_634 = (float)(this->weight_winograd43_data).w;
                              fStack_630 = (float)(this->weight_winograd43_data).h;
                              uStack_650 = (pointer)(this->weight_winograd43_data).elemsize;
                              afStack_648[0] = (float)(this->weight_winograd43_data).elempack;
                              local_640 = (this->weight_winograd43_data).allocator;
                              local_620 = (long)(int)fStack_630 * (long)(int)fStack_634;
                              local_660 = (undefined1  [8])
                                          ((long)(this->weight_winograd43_data).data +
                                          (long)uStack_650 * local_620 * (long)(iVar257 / iVar187) +
                                          (this->weight_winograd43_data).cstep * (long)local_858 *
                                          (long)uStack_650);
                              afStack_658[0] = 0.0;
                              afStack_658[1] = 0.0;
                              local_6b8.dims = 2;
                              iStack_62c = 1;
                              iStack_628 = 1;
                              local_6b8.elemsize = CONCAT71(uStack_8bf,local_8c0);
                              local_6b8.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                              local_6b8.data =
                                   (void *)((long)local_8d0 +
                                           local_6b8.cstep * local_6b8.elemsize *
                                           (long)(iVar257 / iVar187) +
                                           (long)(int)((long)((ulong)(uint)(iVar239 >> 0x1f) << 0x20
                                                             | local_980._0_8_ & 0xffffffff) /
                                                      (long)(int)local_8d8) * local_890 *
                                           local_6b8.elemsize);
                              local_6b8.refcount = (int *)0x0;
                              local_6b8.elempack = (int)local_8b8;
                              local_6b8.allocator = local_8b0;
                              local_6b8.w = (int)fStack_8a4;
                              local_6b8.h = (int)fStack_8a0;
                              local_6b8.d = 1;
                              local_6b8.c = 1;
                              iStack_638 = local_6b8.dims;
                              gemm_transB_packed_tile
                                        ((Mat *)local_660,&local_6b8,&local_738,0x24,(int)local_6e0,
                                         iVar258,iVar257,iVar189);
                              auVar1130 = ZEXT1664(CONCAT412(0x3fb504f3,
                                                             CONCAT48(0x3fb504f3,0x3fb504f33fb504f3)
                                                            ));
                              auVar1060 = ZEXT1664(CONCAT412(0x3f3504f3,
                                                             CONCAT48(0x3f3504f3,0x3f3504f33f3504f3)
                                                            ));
                              auVar1506 = ZEXT3264(CONCAT428(0x403504f3,
                                                             CONCAT424(0x403504f3,
                                                                       CONCAT420(0x403504f3,
                                                                                 CONCAT416(
                                                  0x403504f3,
                                                  CONCAT412(0x403504f3,
                                                            CONCAT48(0x403504f3,0x403504f3403504f3))
                                                  )))));
                              auVar1488 = ZEXT3264(CONCAT428(0x3eb504f3,
                                                             CONCAT424(0x3eb504f3,
                                                                       CONCAT420(0x3eb504f3,
                                                                                 CONCAT416(
                                                  0x3eb504f3,
                                                  CONCAT412(0x3eb504f3,
                                                            CONCAT48(0x3eb504f3,0x3eb504f33eb504f3))
                                                  )))));
                              auVar1452 = ZEXT3264(CONCAT428(0x40000000,
                                                             CONCAT424(0x40000000,
                                                                       CONCAT420(0x40000000,
                                                                                 CONCAT416(
                                                  0x40000000,
                                                  CONCAT412(0x40000000,
                                                            CONCAT48(0x40000000,0x4000000040000000))
                                                  )))));
                              auVar1379 = ZEXT3264(CONCAT428(0x3f000000,
                                                             CONCAT424(0x3f000000,
                                                                       CONCAT420(0x3f000000,
                                                                                 CONCAT416(
                                                  0x3f000000,
                                                  CONCAT412(0x3f000000,
                                                            CONCAT48(0x3f000000,0x3f0000003f000000))
                                                  )))));
                              auVar1305 = ZEXT3264(CONCAT428(0x3fb504f3,
                                                             CONCAT424(0x3fb504f3,
                                                                       CONCAT420(0x3fb504f3,
                                                                                 CONCAT416(
                                                  0x3fb504f3,
                                                  CONCAT412(0x3fb504f3,
                                                            CONCAT48(0x3fb504f3,0x3fb504f33fb504f3))
                                                  )))));
                              auVar1218 = ZEXT3264(CONCAT428(0x3f3504f3,
                                                             CONCAT424(0x3f3504f3,
                                                                       CONCAT420(0x3f3504f3,
                                                                                 CONCAT416(
                                                  0x3f3504f3,
                                                  CONCAT412(0x3f3504f3,
                                                            CONCAT48(0x3f3504f3,0x3f3504f33f3504f3))
                                                  )))));
                              iVar257 = iVar257 + iVar187;
                              uVar210 = (ulong)(uint)-(iVar187 - iVar249);
                            }
                            iVar187 = top_blob->w;
                            iVar257 = top_blob->elempack;
                            iVar249 = top_blob->h;
                            iVar190 = (int)top_blob->cstep * iVar257;
                            local_840._0_4_ = (iVar187 + 3) / 4;
                            iVar192 = iVar190 * 2;
                            iVar189 = iVar190 * 3;
                            local_a40._4_4_ = iVar189 >> 0x1f;
                            lVar234 = (long)(iVar190 * 4);
                            lVar256 = (long)(iVar190 * 5);
                            local_9c0._0_8_ = lVar256;
                            lVar201 = (long)(iVar190 * 6);
                            local_880._0_8_ = lVar201;
                            lVar216 = (long)(iVar190 * 7);
                            local_9c8 = (void *)CONCAT44(local_9c8._4_4_,iVar258 * 0x24);
                            auVar182._8_8_ = 0;
                            auVar182._0_8_ = local_ab0._8_8_;
                            local_ab0 = auVar182 << 0x40;
                            uVar210 = 0;
                            if (0 < iVar258) {
                              uVar210 = local_6f0._0_8_ & 0xffffffff;
                            }
                            local_960._0_8_ = uVar210;
                            local_788 = (void *)((long)(iVar258 * 0x28) * 4);
                            local_850 = (void *)((long)(iVar258 << 5) * 4);
                            lVar217 = (long)(iVar258 * 0x18) * 4;
                            lVar202 = (long)(iVar258 << 4) * 4;
                            pvVar204 = (this->super_Convolution).bias_data.data;
                            local_818 = CONCAT44(local_818._4_4_,iVar258 * 0x120);
                            lVar215 = (long)(iVar258 * 8) * 4;
                            local_7c0._0_8_ = lVar217;
                            for (uVar209 = 0; auVar268 = local_ab0, (long)(uVar209 | 7) < lVar200;
                                uVar209 = uVar209 + 8) {
                              if (pvVar204 == (void *)0x0) {
                                auVar376 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                              }
                              else {
                                auVar376 = *(undefined1 (*) [32])
                                            ((long)pvVar204 + uVar209 * 4 + lVar208 * 4);
                              }
                              lVar203 = (long)(int)local_ab0._0_4_;
                              lVar219 = 0;
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                local_760 = (int)lVar219;
                                iStack_75c = (int)((ulong)lVar219 >> 0x20);
                                lVar205 = (long)local_738.data + lVar219;
                                lVar218 = -0xc0;
                                while( true ) {
                                  if (lVar218 == 0) break;
                                  auVar1215 = *(undefined1 (*) [32])
                                               (lVar205 + lVar215 + lVar203 * 4);
                                  auVar1449 = *(undefined1 (*) [32])
                                               (lVar205 + lVar202 + lVar203 * 4);
                                  auVar1485 = *(undefined1 (*) [32])
                                               (lVar205 + lVar217 + lVar203 * 4);
                                  auVar613 = *(undefined1 (*) [32])
                                              ((long)local_850 + lVar205 + lVar203 * 4);
                                  fVar248 = auVar1449._0_4_ + auVar1215._0_4_;
                                  fVar220 = auVar1449._4_4_ + auVar1215._4_4_;
                                  fVar864 = auVar1449._8_4_ + auVar1215._8_4_;
                                  fVar865 = auVar1449._12_4_ + auVar1215._12_4_;
                                  fVar866 = auVar1449._16_4_ + auVar1215._16_4_;
                                  fVar867 = auVar1449._20_4_ + auVar1215._20_4_;
                                  fVar868 = auVar1449._24_4_ + auVar1215._24_4_;
                                  fVar869 = auVar1449._28_4_ + auVar1215._28_4_;
                                  auVar931._0_4_ = auVar613._0_4_ + auVar1485._0_4_;
                                  auVar931._4_4_ = auVar613._4_4_ + auVar1485._4_4_;
                                  auVar931._8_4_ = auVar613._8_4_ + auVar1485._8_4_;
                                  auVar931._12_4_ = auVar613._12_4_ + auVar1485._12_4_;
                                  auVar931._16_4_ = auVar613._16_4_ + auVar1485._16_4_;
                                  auVar931._20_4_ = auVar613._20_4_ + auVar1485._20_4_;
                                  auVar931._24_4_ = auVar613._24_4_ + auVar1485._24_4_;
                                  auVar931._28_4_ = auVar613._28_4_ + auVar1485._28_4_;
                                  auVar1215 = vsubps_avx(auVar1215,auVar1449);
                                  auVar1449 = vsubps_avx(auVar1485,auVar613);
                                  pfVar197 = (float *)(lVar205 + lVar203 * 4);
                                  auVar616._0_4_ = fVar248 + *pfVar197 + auVar931._0_4_;
                                  auVar616._4_4_ = fVar220 + pfVar197[1] + auVar931._4_4_;
                                  auVar616._8_4_ = fVar864 + pfVar197[2] + auVar931._8_4_;
                                  auVar616._12_4_ = fVar865 + pfVar197[3] + auVar931._12_4_;
                                  auVar616._16_4_ = fVar866 + pfVar197[4] + auVar931._16_4_;
                                  auVar616._20_4_ = fVar867 + pfVar197[5] + auVar931._20_4_;
                                  auVar616._24_4_ = fVar868 + pfVar197[6] + auVar931._24_4_;
                                  auVar616._28_4_ = fVar869 + pfVar197[7] + auVar931._28_4_;
                                  auVar24._4_4_ = auVar1218._4_4_ * auVar1215._4_4_;
                                  auVar24._0_4_ = auVar1218._0_4_ * auVar1215._0_4_;
                                  auVar24._8_4_ = auVar1218._8_4_ * auVar1215._8_4_;
                                  auVar24._12_4_ = auVar1218._12_4_ * auVar1215._12_4_;
                                  auVar24._16_4_ = auVar1218._16_4_ * auVar1215._16_4_;
                                  auVar24._20_4_ = auVar1218._20_4_ * auVar1215._20_4_;
                                  auVar24._24_4_ = auVar1218._24_4_ * auVar1215._24_4_;
                                  auVar24._28_4_ = auVar613._28_4_;
                                  auVar945 = vfmadd231ps_fma(auVar24,auVar1449,auVar1305._0_32_);
                                  auVar25._4_4_ = auVar1379._4_4_ * fVar220;
                                  auVar25._0_4_ = auVar1379._0_4_ * fVar248;
                                  auVar25._8_4_ = auVar1379._8_4_ * fVar864;
                                  auVar25._12_4_ = auVar1379._12_4_ * fVar865;
                                  auVar25._16_4_ = auVar1379._16_4_ * fVar866;
                                  auVar25._20_4_ = auVar1379._20_4_ * fVar867;
                                  auVar25._24_4_ = auVar1379._24_4_ * fVar868;
                                  auVar25._28_4_ = fVar869;
                                  auVar310 = vfmadd213ps_fma(auVar1215,auVar1488._0_32_,
                                                             *(undefined1 (*) [32])
                                                              ((long)local_788 +
                                                              lVar205 + lVar203 * 4));
                                  auVar309 = vfmadd231ps_fma(auVar25,auVar1452._0_32_,auVar931);
                                  auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1506._0_32_,
                                                             auVar1449);
                                  *(undefined1 (*) [32])((long)local_5a0 + lVar218) = auVar616;
                                  *(undefined1 (*) [32])((long)auStack_4e0 + lVar218) =
                                       ZEXT1632(auVar945);
                                  *(undefined1 (*) [32])(auStack_420 + lVar218) = ZEXT1632(auVar309)
                                  ;
                                  *(undefined1 (*) [32])(auStack_360 + lVar218) = ZEXT1632(auVar310)
                                  ;
                                  lVar218 = lVar218 + 0x20;
                                  lVar205 = lVar205 + (long)(iVar258 * 0x30) * 4;
                                }
                                local_780._0_4_ = (int)uVar229;
                                iVar207 = (iVar239 + (int)local_780) % (int)(uint)local_840;
                                uVar259 = (iVar239 + (int)local_780) / (int)(uint)local_840 << 2;
                                pauVar236 = (undefined1 (*) [32])
                                            ((long)top_blob->data +
                                            (long)(iVar207 * 4 * iVar257) * 4 +
                                            (long)top_blob->w * top_blob->elemsize *
                                            (long)(int)uVar259 +
                                            (long)((iVar188 + (int)uVar209) / iVar257) *
                                            top_blob->cstep * top_blob->elemsize);
                                local_a60._0_4_ = (float)(iVar207 * 4 + 1);
                                local_a80._0_4_ = (float)(iVar207 * 4 + 2);
                                local_a20._0_4_ = iVar207 * 4 + 3;
                                pfVar197 = local_5c0;
                                for (lVar205 = 0; lVar205 != 4; lVar205 = lVar205 + 1) {
                                  if ((int)(uVar259 | (uint)lVar205) < iVar249) {
                                    auVar1215 = *(undefined1 (*) [32])(pfVar197 + -0x20);
                                    auVar1449 = *(undefined1 (*) [32])(pfVar197 + -0x18);
                                    auVar1485 = *(undefined1 (*) [32])(pfVar197 + -0x10);
                                    auVar613 = *(undefined1 (*) [32])(pfVar197 + -8);
                                    auVar504._0_4_ = auVar1449._0_4_ + auVar1215._0_4_;
                                    auVar504._4_4_ = auVar1449._4_4_ + auVar1215._4_4_;
                                    auVar504._8_4_ = auVar1449._8_4_ + auVar1215._8_4_;
                                    auVar504._12_4_ = auVar1449._12_4_ + auVar1215._12_4_;
                                    auVar504._16_4_ = auVar1449._16_4_ + auVar1215._16_4_;
                                    auVar504._20_4_ = auVar1449._20_4_ + auVar1215._20_4_;
                                    auVar504._24_4_ = auVar1449._24_4_ + auVar1215._24_4_;
                                    auVar504._28_4_ = auVar1449._28_4_ + auVar1215._28_4_;
                                    auVar932._0_4_ = auVar613._0_4_ + auVar1485._0_4_;
                                    auVar932._4_4_ = auVar613._4_4_ + auVar1485._4_4_;
                                    auVar932._8_4_ = auVar613._8_4_ + auVar1485._8_4_;
                                    auVar932._12_4_ = auVar613._12_4_ + auVar1485._12_4_;
                                    auVar932._16_4_ = auVar613._16_4_ + auVar1485._16_4_;
                                    auVar932._20_4_ = auVar613._20_4_ + auVar1485._20_4_;
                                    auVar932._24_4_ = auVar613._24_4_ + auVar1485._24_4_;
                                    auVar932._28_4_ = auVar613._28_4_ + auVar1485._28_4_;
                                    auVar1215 = vsubps_avx(auVar1215,auVar1449);
                                    auVar1449 = vsubps_avx(auVar1485,auVar613);
                                    auVar664._0_4_ =
                                         auVar376._0_4_ + pfVar197[-0x28] + auVar504._0_4_ +
                                         auVar932._0_4_;
                                    auVar664._4_4_ =
                                         auVar376._4_4_ + pfVar197[-0x27] + auVar504._4_4_ +
                                         auVar932._4_4_;
                                    auVar664._8_4_ =
                                         auVar376._8_4_ + pfVar197[-0x26] + auVar504._8_4_ +
                                         auVar932._8_4_;
                                    auVar664._12_4_ =
                                         auVar376._12_4_ + pfVar197[-0x25] + auVar504._12_4_ +
                                         auVar932._12_4_;
                                    auVar744._16_4_ =
                                         auVar376._16_4_ + pfVar197[-0x24] + auVar504._16_4_ +
                                         auVar932._16_4_;
                                    auVar744._0_16_ = auVar664;
                                    auVar744._20_4_ =
                                         auVar376._20_4_ + pfVar197[-0x23] + auVar504._20_4_ +
                                         auVar932._20_4_;
                                    auVar744._24_4_ =
                                         auVar376._24_4_ + pfVar197[-0x22] + auVar504._24_4_ +
                                         auVar932._24_4_;
                                    auVar744._28_4_ =
                                         auVar376._28_4_ + pfVar197[-0x21] + auVar504._28_4_ +
                                         auVar932._28_4_;
                                    auVar310 = vfmadd213ps_fma(auVar1218._0_32_,auVar1215,auVar376);
                                    auVar945 = vfmadd213ps_fma(auVar504,auVar1379._0_32_,auVar376);
                                    auVar945 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar1452._0_32_,
                                                               auVar932);
                                    auVar397._0_4_ = auVar376._0_4_ + *pfVar197;
                                    auVar397._4_4_ = auVar376._4_4_ + pfVar197[1];
                                    auVar397._8_4_ = auVar376._8_4_ + pfVar197[2];
                                    auVar397._12_4_ = auVar376._12_4_ + pfVar197[3];
                                    auVar397._16_4_ = auVar376._16_4_ + pfVar197[4];
                                    auVar397._20_4_ = auVar376._20_4_ + pfVar197[5];
                                    auVar397._24_4_ = auVar376._24_4_ + pfVar197[6];
                                    auVar397._28_4_ = auVar376._28_4_ + pfVar197[7];
                                    auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1449,
                                                               auVar1305._0_32_);
                                    auVar309 = vfmadd231ps_fma(auVar397,auVar1488._0_32_,auVar1215);
                                    auVar309 = vfmadd231ps_fma(ZEXT1632(auVar309),auVar1506._0_32_,
                                                               auVar1449);
                                    auVar534 = auVar744._16_16_;
                                    if (iVar257 == 1) {
                                      *(float *)*pauVar236 = auVar664._0_4_;
                                      uVar211 = vextractps_avx(auVar664,1);
                                      *(undefined4 *)(*pauVar236 + (long)iVar190 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar664,2);
                                      *(undefined4 *)(*pauVar236 + (long)iVar192 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar664,3);
                                      *(undefined4 *)(*pauVar236 + (long)iVar189 * 4) = uVar211;
                                      *(float *)(*pauVar236 + lVar234 * 4) = auVar744._16_4_;
                                      uVar211 = vextractps_avx(auVar534,1);
                                      *(undefined4 *)(*pauVar236 + lVar256 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar534,2);
                                      *(undefined4 *)(*pauVar236 + lVar201 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar534,3);
                                      *(undefined4 *)(*pauVar236 + lVar216 * 4) = uVar211;
                                      if ((int)(float)local_a60 < iVar187) {
                                        *(int *)(*pauVar236 + 4) = auVar310._0_4_;
                                        uVar211 = vextractps_avx(auVar310,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar190 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar310,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar192 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar310,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 4) =
                                             uVar211;
                                        *(undefined4 *)(*pauVar236 + lVar234 * 4 + 4) = 0;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar236 + lVar256 * 4 + 4) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar236 + lVar201 * 4 + 4) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar236 + lVar216 * 4 + 4) = uVar211;
                                      }
                                      if ((int)(float)local_a80 < iVar187) {
                                        *(int *)(*pauVar236 + 8) = auVar945._0_4_;
                                        uVar211 = vextractps_avx(auVar945,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar190 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar945,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar192 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar945,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 8) =
                                             uVar211;
                                        *(undefined4 *)(*pauVar236 + lVar234 * 4 + 8) = 0;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar236 + lVar256 * 4 + 8) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar236 + lVar201 * 4 + 8) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar236 + lVar216 * 4 + 8) = uVar211;
                                      }
                                      if ((int)local_a20 < iVar187) {
                                        *(int *)(*pauVar236 + 0xc) = auVar309._0_4_;
                                        uVar211 = vextractps_avx(auVar309,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar190 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar309,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar192 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar309,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 0xc) =
                                             uVar211;
                                        *(undefined4 *)(*pauVar236 + lVar234 * 4 + 0xc) = 0;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,1);
                                        *(undefined4 *)(*pauVar236 + lVar256 * 4 + 0xc) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,2);
                                        *(undefined4 *)(*pauVar236 + lVar201 * 4 + 0xc) = uVar211;
                                        uVar211 = vextractps_avx((undefined1  [16])0x0,3);
                                        *(undefined4 *)(*pauVar236 + lVar216 * 4 + 0xc) = uVar211;
                                      }
                                    }
                                    else if (iVar257 == 4) {
                                      *(undefined1 (*) [16])*pauVar236 = auVar664;
                                      *(undefined1 (*) [16])(*pauVar236 + (long)iVar190 * 4) =
                                           auVar534;
                                      if ((int)(float)local_a60 < iVar187) {
                                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar310;
                                        *(undefined1 (*) [16])
                                         (*pauVar236 + (long)iVar190 * 4 + 0x10) =
                                             (undefined1  [16])0x0;
                                      }
                                      if ((int)(float)local_a80 < iVar187) {
                                        *(undefined1 (*) [16])pauVar236[1] = auVar945;
                                        *(undefined1 (*) [16])(pauVar236[1] + (long)iVar190 * 4) =
                                             (undefined1  [16])0x0;
                                      }
                                      if ((int)local_a20 < iVar187) {
                                        *(undefined1 (*) [16])(pauVar236[1] + 0x10) = auVar309;
                                        *(undefined1 (*) [16])
                                         (pauVar236[1] + (long)iVar190 * 4 + 0x10) =
                                             (undefined1  [16])0x0;
                                      }
                                    }
                                    else if (iVar257 == 8) {
                                      *pauVar236 = auVar744;
                                      if ((int)(float)local_a60 < iVar187) {
                                        pauVar236[1] = ZEXT1632(auVar310);
                                      }
                                      if ((int)(float)local_a80 < iVar187) {
                                        pauVar236[2] = ZEXT1632(auVar945);
                                      }
                                      if ((int)local_a20 < iVar187) {
                                        pauVar236[3] = ZEXT1632(auVar309);
                                      }
                                    }
                                    pauVar236 = (undefined1 (*) [32])
                                                (*pauVar236 + (long)(iVar257 * iVar187) * 4);
                                  }
                                  pfVar197 = pfVar197 + 0x30;
                                }
                                lVar219 = lVar219 + 0x20;
                              }
                              local_ab0._4_4_ = 0;
                              local_ab0._0_4_ = local_ab0._0_4_ + iVar258 * 0x120;
                              local_ab0._8_8_ = auVar268._8_8_;
                            }
                            local_a00._0_8_ = SEXT48(iVar258 * 4);
                            local_780 = (long)(iVar258 * 0x14) * 4;
                            local_9a0._0_8_ = (long)(iVar258 * 0xc) * 4;
                            for (; auVar268 = local_ab0, (long)(uVar209 | 3) < lVar200;
                                uVar209 = uVar209 + 4) {
                              if (pvVar204 == (void *)0x0) {
                                auVar310 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar310 = *(undefined1 (*) [16])
                                            ((long)pvVar204 + uVar209 * 4 + lVar208 * 4);
                              }
                              lVar234 = (long)(int)local_ab0._0_4_;
                              local_760 = iVar188 + (int)uVar209;
                              lVar256 = 0;
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                local_9c0._0_8_ = lVar256;
                                lVar216 = (long)local_738.data + lVar256;
                                for (lVar201 = -0x60; lVar201 != 0; lVar201 = lVar201 + 0x10) {
                                  auVar945 = *(undefined1 (*) [16])
                                              (lVar216 + local_a00._0_8_ * 4 + lVar234 * 4);
                                  auVar309 = *(undefined1 (*) [16])(lVar216 + lVar215 + lVar234 * 4)
                                  ;
                                  auVar534 = *(undefined1 (*) [16])
                                              (lVar216 + local_9a0._0_8_ + lVar234 * 4);
                                  auVar668 = *(undefined1 (*) [16])(lVar216 + lVar202 + lVar234 * 4)
                                  ;
                                  fVar248 = auVar309._0_4_ + auVar945._0_4_;
                                  fVar220 = auVar309._4_4_ + auVar945._4_4_;
                                  fVar864 = auVar309._8_4_ + auVar945._8_4_;
                                  fVar865 = auVar309._12_4_ + auVar945._12_4_;
                                  auVar882._0_4_ = auVar668._0_4_ + auVar534._0_4_;
                                  auVar882._4_4_ = auVar668._4_4_ + auVar534._4_4_;
                                  auVar882._8_4_ = auVar668._8_4_ + auVar534._8_4_;
                                  auVar882._12_4_ = auVar668._12_4_ + auVar534._12_4_;
                                  auVar945 = vsubps_avx(auVar945,auVar309);
                                  auVar309 = vsubps_avx(auVar534,auVar668);
                                  pfVar197 = (float *)(lVar216 + lVar234 * 4);
                                  auVar529._0_4_ = fVar248 + *pfVar197 + auVar882._0_4_;
                                  auVar529._4_4_ = fVar220 + pfVar197[1] + auVar882._4_4_;
                                  auVar529._8_4_ = fVar864 + pfVar197[2] + auVar882._8_4_;
                                  auVar529._12_4_ = fVar865 + pfVar197[3] + auVar882._12_4_;
                                  auVar665._0_4_ = auVar1060._0_4_ * auVar945._0_4_;
                                  auVar665._4_4_ = auVar1060._4_4_ * auVar945._4_4_;
                                  auVar665._8_4_ = auVar1060._8_4_ * auVar945._8_4_;
                                  auVar665._12_4_ = auVar1060._12_4_ * auVar945._12_4_;
                                  auVar534 = vfmadd231ps_fma(auVar665,auVar309,auVar1130._0_16_);
                                  auVar800._0_4_ = fVar248 * 0.5;
                                  auVar800._4_4_ = fVar220 * 0.5;
                                  auVar800._8_4_ = fVar864 * 0.5;
                                  auVar800._12_4_ = fVar865 * 0.5;
                                  auVar956._8_4_ = 0x3eb504f3;
                                  auVar956._0_8_ = 0x3eb504f33eb504f3;
                                  auVar956._12_4_ = 0x3eb504f3;
                                  auVar945 = vfmadd213ps_fma(auVar945,auVar956,
                                                             *(undefined1 (*) [16])
                                                              (lVar216 + local_780 + lVar234 * 4));
                                  auVar957._8_4_ = 0x40000000;
                                  auVar957._0_8_ = 0x4000000040000000;
                                  auVar957._12_4_ = 0x40000000;
                                  auVar668 = vfmadd231ps_fma(auVar800,auVar957,auVar882);
                                  auVar883._8_4_ = 0x403504f3;
                                  auVar883._0_8_ = 0x403504f3403504f3;
                                  auVar883._12_4_ = 0x403504f3;
                                  auVar945 = vfmadd231ps_fma(auVar945,auVar883,auVar309);
                                  *(undefined1 (*) [16])((long)local_600 + lVar201) = auVar529;
                                  *(undefined1 (*) [16])((long)local_5a0 + lVar201) = auVar534;
                                  *(undefined1 (*) [16])(auStack_540 + lVar201) = auVar668;
                                  *(undefined1 (*) [16])((long)auStack_4e0 + lVar201) = auVar945;
                                  lVar216 = lVar216 + lVar217;
                                }
                                local_880._0_8_ = uVar229;
                                iVar193 = iVar239 + (int)uVar229;
                                iVar207 = iVar193 % (int)(uint)local_840;
                                uVar259 = iVar193 / (int)(uint)local_840 << 2;
                                pauVar226 = (undefined1 (*) [16])
                                            ((long)top_blob->data +
                                            (long)(iVar207 * 4 * iVar257) * 4 +
                                            (long)top_blob->w * top_blob->elemsize *
                                            (long)(int)uVar259 +
                                            (long)(local_760 / iVar257) * top_blob->cstep *
                                            top_blob->elemsize);
                                local_a60._0_4_ = (float)(iVar207 * 4 + 1);
                                local_a80._0_4_ = (float)(iVar207 * 4 + 2);
                                local_a20._0_4_ = iVar207 * 4 + 3;
                                pfVar197 = afStack_618 + 2;
                                for (lVar201 = 0; lVar201 != 4; lVar201 = lVar201 + 1) {
                                  if ((int)(uVar259 | (uint)lVar201) < iVar249) {
                                    auVar945 = *(undefined1 (*) [16])(pfVar197 + -0x10);
                                    auVar309 = *(undefined1 (*) [16])(pfVar197 + -0xc);
                                    auVar534 = *(undefined1 (*) [16])(pfVar197 + -8);
                                    auVar668 = *(undefined1 (*) [16])(pfVar197 + -4);
                                    auVar428._0_4_ = auVar309._0_4_ + auVar945._0_4_;
                                    auVar428._4_4_ = auVar309._4_4_ + auVar945._4_4_;
                                    auVar428._8_4_ = auVar309._8_4_ + auVar945._8_4_;
                                    auVar428._12_4_ = auVar309._12_4_ + auVar945._12_4_;
                                    auVar884._0_4_ = auVar668._0_4_ + auVar534._0_4_;
                                    auVar884._4_4_ = auVar668._4_4_ + auVar534._4_4_;
                                    auVar884._8_4_ = auVar668._8_4_ + auVar534._8_4_;
                                    auVar884._12_4_ = auVar668._12_4_ + auVar534._12_4_;
                                    auVar945 = vsubps_avx(auVar945,auVar309);
                                    auVar309 = vsubps_avx(auVar534,auVar668);
                                    auVar666._0_4_ =
                                         auVar310._0_4_ + pfVar197[-0x14] + auVar428._0_4_ +
                                         auVar884._0_4_;
                                    auVar666._4_4_ =
                                         auVar310._4_4_ + pfVar197[-0x13] + auVar428._4_4_ +
                                         auVar884._4_4_;
                                    auVar666._8_4_ =
                                         auVar310._8_4_ + pfVar197[-0x12] + auVar428._8_4_ +
                                         auVar884._8_4_;
                                    auVar666._12_4_ =
                                         auVar310._12_4_ + pfVar197[-0x11] + auVar428._12_4_ +
                                         auVar884._12_4_;
                                    auVar534 = vfmadd213ps_fma(auVar1060._0_16_,auVar945,auVar310);
                                    auVar350._8_4_ = 0x3f000000;
                                    auVar350._0_8_ = 0x3f0000003f000000;
                                    auVar350._12_4_ = 0x3f000000;
                                    auVar668 = vfmadd213ps_fma(auVar428,auVar350,auVar310);
                                    auVar351._8_4_ = 0x40000000;
                                    auVar351._0_8_ = 0x4000000040000000;
                                    auVar351._12_4_ = 0x40000000;
                                    auVar668 = vfmadd231ps_fma(auVar668,auVar351,auVar884);
                                    auVar352._0_4_ = auVar310._0_4_ + *pfVar197;
                                    auVar352._4_4_ = auVar310._4_4_ + pfVar197[1];
                                    auVar352._8_4_ = auVar310._8_4_ + pfVar197[2];
                                    auVar352._12_4_ = auVar310._12_4_ + pfVar197[3];
                                    auVar534 = vfmadd231ps_fma(auVar534,auVar309,auVar1130._0_16_);
                                    auVar885._8_4_ = 0x3eb504f3;
                                    auVar885._0_8_ = 0x3eb504f33eb504f3;
                                    auVar885._12_4_ = 0x3eb504f3;
                                    auVar945 = vfmadd231ps_fma(auVar352,auVar885,auVar945);
                                    auVar886._8_4_ = 0x403504f3;
                                    auVar886._0_8_ = 0x403504f3403504f3;
                                    auVar886._12_4_ = 0x403504f3;
                                    auVar945 = vfmadd231ps_fma(auVar945,auVar886,auVar309);
                                    if (iVar257 == 1) {
                                      *(float *)*pauVar226 = auVar666._0_4_;
                                      uVar211 = vextractps_avx(auVar666,1);
                                      *(undefined4 *)(*pauVar226 + (long)iVar190 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar666,2);
                                      *(undefined4 *)(*pauVar226 + (long)iVar192 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar666,3);
                                      *(undefined4 *)(*pauVar226 + (long)iVar189 * 4) = uVar211;
                                      if ((int)(float)local_a60 < iVar187) {
                                        *(int *)(*pauVar226 + 4) = auVar534._0_4_;
                                        uVar211 = vextractps_avx(auVar534,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar190 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar534,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar192 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar534,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 4) =
                                             uVar211;
                                      }
                                      if ((int)(float)local_a80 < iVar187) {
                                        *(int *)(*pauVar226 + 8) = auVar668._0_4_;
                                        uVar211 = vextractps_avx(auVar668,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar190 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar668,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar192 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar668,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 8) =
                                             uVar211;
                                      }
                                      if ((int)local_a20 < iVar187) {
                                        *(int *)(*pauVar226 + 0xc) = auVar945._0_4_;
                                        uVar211 = vextractps_avx(auVar945,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar190 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar945,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar192 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar945,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 0xc) =
                                             uVar211;
                                      }
                                    }
                                    else if (iVar257 == 4) {
                                      *pauVar226 = auVar666;
                                      if ((int)(float)local_a60 < iVar187) {
                                        pauVar226[1] = auVar534;
                                      }
                                      if ((int)(float)local_a80 < iVar187) {
                                        pauVar226[2] = auVar668;
                                      }
                                      if ((int)local_a20 < iVar187) {
                                        pauVar226[3] = auVar945;
                                      }
                                    }
                                    pauVar226 = (undefined1 (*) [16])
                                                (*pauVar226 + (long)(iVar257 * iVar187) * 4);
                                  }
                                  pfVar197 = pfVar197 + 0x18;
                                }
                                lVar256 = lVar256 + 0x10;
                              }
                              local_ab0._4_4_ = 0;
                              local_ab0._0_4_ = local_ab0._0_4_ + iVar258 * 0x90;
                              local_ab0._8_8_ = auVar268._8_8_;
                            }
                            local_a40 = CONCAT44(local_a40._4_4_,iVar258 * 0x48);
                            for (; auVar268 = local_ab0, (long)(uVar209 | 1) < lVar200;
                                uVar209 = uVar209 + 2) {
                              lVar234 = uVar209 + lVar208;
                              if (pvVar204 == (void *)0x0) {
                                auVar310 = (undefined1  [16])0x0;
                                auVar945 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar310 = ZEXT416(*(uint *)((long)pvVar204 + lVar234 * 4));
                                auVar945 = ZEXT416(*(uint *)((long)pvVar204 + lVar234 * 4 + 4));
                              }
                              iVar257 = top_blob->w;
                              sVar13 = top_blob->cstep;
                              sVar14 = top_blob->elemsize;
                              pvVar251 = top_blob->data;
                              puVar224 = (undefined8 *)
                                         ((long)local_738.data + (long)(int)local_ab0._0_4_ * 4);
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                puVar214 = puVar224;
                                for (lVar256 = -6; lVar256 != 0; lVar256 = lVar256 + 1) {
                                  uVar196 = *(ulong *)((long)puVar214 + (long)(iVar258 * 2) * 4);
                                  auVar429._8_8_ = 0;
                                  auVar429._0_8_ = uVar196;
                                  uVar242 = *(ulong *)((long)puVar214 + local_a00._0_8_ * 4);
                                  auVar530._8_8_ = 0;
                                  auVar530._0_8_ = uVar242;
                                  fVar248 = (float)uVar242 + (float)uVar196;
                                  fVar220 = (float)(uVar242 >> 0x20) + (float)(uVar196 >> 0x20);
                                  uVar196 = *(ulong *)((long)puVar214 + (long)(iVar258 * 6) * 4);
                                  auVar801._8_8_ = 0;
                                  auVar801._0_8_ = uVar196;
                                  uVar242 = *(ulong *)((long)puVar214 + (long)(iVar258 * 8) * 4);
                                  auVar887._8_8_ = 0;
                                  auVar887._0_8_ = uVar242;
                                  auVar958._0_4_ = (float)uVar242 + (float)uVar196;
                                  auVar958._4_4_ =
                                       (float)(uVar242 >> 0x20) + (float)(uVar196 >> 0x20);
                                  auVar958._8_8_ = 0;
                                  auVar1011._0_4_ = auVar958._0_4_ + fVar248 + (float)*puVar214;
                                  auVar1011._4_4_ =
                                       auVar958._4_4_ + fVar220 + (float)((ulong)*puVar214 >> 0x20);
                                  auVar1011._8_8_ = 0;
                                  uVar266 = vmovlps_avx(auVar1011);
                                  *(undefined8 *)(&fStack_630 + lVar256 * 2) = uVar266;
                                  auVar309 = vinsertps_avx(auVar801,auVar429,0x50);
                                  auVar534 = vinsertps_avx(auVar887,auVar530,0x50);
                                  auVar668 = vsubps_avx(auVar309,auVar534);
                                  auVar309 = vinsertps_avx(auVar429,auVar801,0x50);
                                  auVar534 = vinsertps_avx(auVar530,auVar887,0x50);
                                  auVar309 = vsubps_avx(auVar309,auVar534);
                                  auVar531._0_4_ = auVar668._0_4_ * 1.4142135;
                                  auVar531._4_4_ = auVar668._4_4_ * 0.70710677;
                                  auVar531._8_4_ = auVar668._8_4_ * 0.0;
                                  auVar531._12_4_ = auVar668._12_4_ * 0.0;
                                  auVar534 = vfmadd231ps_fma(auVar531,auVar309,_DAT_00535460);
                                  uVar266 = vmovlps_avx(auVar534);
                                  *(undefined8 *)(local_600 + lVar256 * 2) = uVar266;
                                  auVar532._0_4_ = fVar248 * 0.5;
                                  auVar532._4_4_ = fVar220 * 0.5;
                                  auVar532._8_8_ = 0;
                                  auVar667._8_4_ = 0x40000000;
                                  auVar667._0_8_ = 0x4000000040000000;
                                  auVar667._12_4_ = 0x40000000;
                                  auVar534 = vfmadd231ps_fma(auVar532,auVar667,auVar958);
                                  uVar266 = vmovlps_avx(auVar534);
                                  *(undefined8 *)(local_5e0 + (lVar256 + 2) * 2) = uVar266;
                                  auVar533._8_8_ = 0;
                                  auVar533._0_8_ =
                                       *(ulong *)((long)puVar214 + (long)(iVar258 * 10) * 4);
                                  auVar534 = vfmadd231ps_fma(auVar533,auVar668,_DAT_00535480);
                                  auVar309 = vfmadd231ps_fma(auVar534,auVar309,_DAT_00535490);
                                  uVar266 = vmovlps_avx(auVar309);
                                  *(undefined8 *)(local_5a0 + lVar256 * 2) = uVar266;
                                  puVar214 = (undefined8 *)
                                             ((long)puVar214 + (long)(iVar258 * 0xc) * 4);
                                }
                                iVar192 = iVar239 + (int)uVar229;
                                iVar189 = iVar192 % (int)(uint)local_840;
                                uVar259 = iVar192 / (int)(uint)local_840 << 2;
                                pfVar197 = (float *)((long)pvVar251 +
                                                    (long)(iVar189 * 4) * 4 +
                                                    (long)(int)uVar259 * (long)iVar257 * sVar14 +
                                                    lVar234 * sVar13 * sVar14);
                                pfVar206 = &fStack_634;
                                auVar1060 = ZEXT1664(CONCAT412(0x3f3504f3,
                                                               CONCAT48(0x3f3504f3,
                                                                        0x3f3504f33f3504f3)));
                                auVar1130 = ZEXT1664(CONCAT412(0x3fb504f3,
                                                               CONCAT48(0x3fb504f3,
                                                                        0x3fb504f33fb504f3)));
                                for (lVar256 = 0; lVar256 != 4; lVar256 = lVar256 + 1) {
                                  if ((int)(uVar259 | (uint)lVar256) < iVar249) {
                                    fVar248 = pfVar206[-5];
                                    fVar220 = pfVar206[-4];
                                    fVar864 = pfVar206[-3];
                                    fVar865 = pfVar206[-2];
                                    fVar869 = pfVar206[-7] + pfVar206[-9];
                                    fVar5 = pfVar206[-6] + pfVar206[-8];
                                    fVar15 = fVar864 + fVar248;
                                    fVar16 = fVar865 + fVar220;
                                    fVar866 = pfVar206[-10];
                                    auVar1259 = ZEXT416((uint)(pfVar206[-9] - pfVar206[-7]));
                                    auVar309 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),
                                                               auVar1259,auVar310);
                                    fVar867 = pfVar206[-1];
                                    auVar1168 = ZEXT416((uint)(pfVar206[-8] - pfVar206[-6]));
                                    auVar534 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eb504f3),0),
                                                               auVar1168,auVar945);
                                    fVar868 = *pfVar206;
                                    *pfVar197 = auVar310._0_4_ + pfVar206[-0xb] + fVar869 + fVar15;
                                    pfVar197[iVar190] = auVar945._0_4_ + fVar866 + fVar5 + fVar16;
                                    auVar413 = ZEXT416((uint)(fVar220 - fVar865));
                                    auVar668 = ZEXT416((uint)(fVar248 - fVar864));
                                    if (iVar189 * 4 + 1 < iVar187) {
                                      auVar1168 = vfmadd213ss_fma(auVar1168,
                                                                  SUB6416(ZEXT464(0x3f3504f3),0),
                                                                  auVar945);
                                      auVar1135 = vfmadd231ss_fma(auVar1168,auVar413,
                                                                  SUB6416(ZEXT464(0x3fb504f3),0));
                                      auVar1168 = vfmadd213ss_fma(auVar1259,
                                                                  SUB6416(ZEXT464(0x3f3504f3),0),
                                                                  auVar310);
                                      auVar1168 = vfmadd231ss_fma(auVar1168,auVar668,
                                                                  SUB6416(ZEXT464(0x3fb504f3),0));
                                      pfVar197[1] = auVar1168._0_4_;
                                      pfVar197[(long)iVar190 + 1] = auVar1135._0_4_;
                                    }
                                    if (iVar189 * 4 + 2 < iVar187) {
                                      auVar1168 = vfmadd213ss_fma(ZEXT416((uint)fVar869),
                                                                  SUB6416(ZEXT464(0x3f000000),0),
                                                                  auVar310);
                                      auVar1168 = vfmadd213ss_fma(ZEXT416((uint)fVar15),
                                                                  SUB6416(ZEXT464(0x40000000),0),
                                                                  auVar1168);
                                      auVar1259 = vfmadd213ss_fma(ZEXT416((uint)fVar5),
                                                                  SUB6416(ZEXT464(0x3f000000),0),
                                                                  auVar945);
                                      auVar1259 = vfmadd213ss_fma(ZEXT416((uint)fVar16),
                                                                  SUB6416(ZEXT464(0x40000000),0),
                                                                  auVar1259);
                                      pfVar197[2] = auVar1168._0_4_;
                                      pfVar197[(long)iVar190 + 2] = auVar1259._0_4_;
                                    }
                                    auVar1218 = ZEXT3264(CONCAT428(0x3f3504f3,
                                                                   CONCAT424(0x3f3504f3,
                                                                             CONCAT420(0x3f3504f3,
                                                                                       CONCAT416(
                                                  0x3f3504f3,
                                                  CONCAT412(0x3f3504f3,
                                                            CONCAT48(0x3f3504f3,0x3f3504f33f3504f3))
                                                  )))));
                                    auVar1305 = ZEXT3264(CONCAT428(0x3fb504f3,
                                                                   CONCAT424(0x3fb504f3,
                                                                             CONCAT420(0x3fb504f3,
                                                                                       CONCAT416(
                                                  0x3fb504f3,
                                                  CONCAT412(0x3fb504f3,
                                                            CONCAT48(0x3fb504f3,0x3fb504f33fb504f3))
                                                  )))));
                                    auVar1379 = ZEXT3264(CONCAT428(0x3f000000,
                                                                   CONCAT424(0x3f000000,
                                                                             CONCAT420(0x3f000000,
                                                                                       CONCAT416(
                                                  0x3f000000,
                                                  CONCAT412(0x3f000000,
                                                            CONCAT48(0x3f000000,0x3f0000003f000000))
                                                  )))));
                                    auVar1452 = ZEXT3264(CONCAT428(0x40000000,
                                                                   CONCAT424(0x40000000,
                                                                             CONCAT420(0x40000000,
                                                                                       CONCAT416(
                                                  0x40000000,
                                                  CONCAT412(0x40000000,
                                                            CONCAT48(0x40000000,0x4000000040000000))
                                                  )))));
                                    auVar1488 = ZEXT3264(CONCAT428(0x3eb504f3,
                                                                   CONCAT424(0x3eb504f3,
                                                                             CONCAT420(0x3eb504f3,
                                                                                       CONCAT416(
                                                  0x3eb504f3,
                                                  CONCAT412(0x3eb504f3,
                                                            CONCAT48(0x3eb504f3,0x3eb504f33eb504f3))
                                                  )))));
                                    auVar1506 = ZEXT3264(CONCAT428(0x403504f3,
                                                                   CONCAT424(0x403504f3,
                                                                             CONCAT420(0x403504f3,
                                                                                       CONCAT416(
                                                  0x403504f3,
                                                  CONCAT412(0x403504f3,
                                                            CONCAT48(0x403504f3,0x403504f3403504f3))
                                                  )))));
                                    if (iVar189 * 4 + 3 < iVar187) {
                                      auVar309 = vfmadd213ss_fma(auVar668,SUB6416(ZEXT464(0x403504f3
                                                                                         ),0),
                                                                 ZEXT416((uint)(auVar309._0_4_ +
                                                                               fVar867)));
                                      auVar534 = vfmadd213ss_fma(auVar413,SUB6416(ZEXT464(0x403504f3
                                                                                         ),0),
                                                                 ZEXT416((uint)(auVar534._0_4_ +
                                                                               fVar868)));
                                      pfVar197[3] = auVar309._0_4_;
                                      pfVar197[(long)iVar190 + 3] = auVar534._0_4_;
                                    }
                                    pfVar197 = pfVar197 + iVar187;
                                    auVar1060 = ZEXT1664(CONCAT412(0x3f3504f3,
                                                                   CONCAT48(0x3f3504f3,
                                                                            0x3f3504f33f3504f3)));
                                    auVar1130 = ZEXT1664(CONCAT412(0x3fb504f3,
                                                                   CONCAT48(0x3fb504f3,
                                                                            0x3fb504f33fb504f3)));
                                  }
                                  pfVar206 = pfVar206 + 0xc;
                                }
                                puVar224 = puVar224 + 1;
                              }
                              local_ab0._4_4_ = 0;
                              local_ab0._0_4_ = local_ab0._0_4_ + iVar258 * 0x48;
                              local_ab0._8_8_ = auVar268._8_8_;
                            }
                            for (; auVar268 = local_ab0, (long)uVar209 < lVar200;
                                uVar209 = uVar209 + 1) {
                              if (pvVar204 == (void *)0x0) {
                                auVar310 = (undefined1  [16])0x0;
                              }
                              else {
                                auVar310 = ZEXT416(*(uint *)((long)pvVar204 +
                                                            (uVar209 + lVar208) * 4));
                              }
                              sVar13 = top_blob->cstep;
                              sVar14 = top_blob->elemsize;
                              pvVar251 = top_blob->data;
                              local_a40 = (long)top_blob->w * sVar14;
                              pfVar197 = (float *)((long)local_738.data +
                                                  (long)(int)local_ab0._0_4_ * 4);
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                pfVar206 = pfVar197;
                                for (lVar234 = -6; lVar234 != 0; lVar234 = lVar234 + 1) {
                                  fVar864 = pfVar206[iVar258 * 2] + pfVar206[iVar258];
                                  fVar248 = pfVar206[iVar258 * 3];
                                  fVar220 = pfVar206[local_a00._0_8_];
                                  fVar865 = fVar220 + fVar248;
                                  fVar866 = pfVar206[iVar258] - pfVar206[iVar258 * 2];
                                  afStack_648[lVar234] = fVar864 + *pfVar206 + fVar865;
                                  auVar309 = ZEXT416((uint)(fVar248 - fVar220));
                                  auVar945 = vfmadd231ss_fma(ZEXT416((uint)(fVar866 * 0.70710677)),
                                                             auVar309,ZEXT416(0x3fb504f3));
                                  (&fStack_630)[lVar234] = auVar945._0_4_;
                                  auVar945 = vfmadd231ss_fma(ZEXT416((uint)(fVar864 * 0.5)),
                                                             ZEXT416((uint)fVar865),
                                                             ZEXT416(0x40000000));
                                  afStack_618[lVar234] = auVar945._0_4_;
                                  auVar945 = vfmadd213ss_fma(ZEXT416((uint)fVar866),
                                                             SUB6416(ZEXT464(0x3eb504f3),0),
                                                             ZEXT416((uint)pfVar206[iVar258 * 5]));
                                  auVar945 = vfmadd231ss_fma(auVar945,auVar309,ZEXT416(0x403504f3));
                                  local_600[lVar234] = auVar945._0_4_;
                                  pfVar206 = pfVar206 + iVar258 * 6;
                                }
                                local_ae0 = (int)uVar229;
                                iVar257 = (iVar239 + local_ae0) % (int)(uint)local_840;
                                uVar259 = (iVar239 + local_ae0) / (int)(uint)local_840 << 2;
                                pfVar206 = (float *)((long)pvVar251 +
                                                    (long)(iVar257 * 4) * 4 +
                                                    (int)uVar259 * local_a40 +
                                                    (uVar209 + lVar208) * sVar13 * sVar14);
                                pfVar246 = (float *)((long)&uStack_650 + 4);
                                for (lVar234 = 0; lVar234 != 4; lVar234 = lVar234 + 1) {
                                  if ((int)(uVar259 | (uint)lVar234) < iVar249) {
                                    fVar248 = pfVar246[-3] + pfVar246[-4];
                                    fVar220 = pfVar246[-1] + pfVar246[-2];
                                    auVar945 = vfmadd132ss_fma(ZEXT416((uint)fVar248),auVar310,
                                                               ZEXT416(0x3f000000));
                                    auVar534 = ZEXT416((uint)(pfVar246[-4] - pfVar246[-3]));
                                    auVar309 = vfmadd231ss_fma(auVar310,auVar534,ZEXT416(0x3eb504f3)
                                                              );
                                    auVar945 = vfmadd231ss_fma(auVar945,ZEXT416((uint)fVar220),
                                                               ZEXT416(0x40000000));
                                    auVar668 = ZEXT416((uint)(pfVar246[-2] - pfVar246[-1]));
                                    auVar309 = vfmadd231ss_fma(ZEXT416((uint)(auVar309._0_4_ +
                                                                             *pfVar246)),auVar668,
                                                               ZEXT416(0x403504f3));
                                    *pfVar206 = auVar310._0_4_ + pfVar246[-5] + fVar248 + fVar220;
                                    if (iVar257 * 4 + 1 < iVar187) {
                                      auVar534 = vfmadd132ss_fma(auVar534,auVar310,
                                                                 ZEXT416(0x3f3504f3));
                                      auVar534 = vfmadd231ss_fma(auVar534,auVar668,
                                                                 ZEXT416(0x3fb504f3));
                                      pfVar206[1] = auVar534._0_4_;
                                    }
                                    if (iVar257 * 4 + 2 < iVar187) {
                                      pfVar206[2] = auVar945._0_4_;
                                    }
                                    if (iVar257 * 4 + 3 < iVar187) {
                                      pfVar206[3] = auVar309._0_4_;
                                    }
                                    pfVar206 = pfVar206 + iVar187;
                                  }
                                  pfVar246 = pfVar246 + 6;
                                }
                                pfVar197 = pfVar197 + 1;
                              }
                              local_ab0._4_4_ = 0;
                              local_ab0._0_4_ = local_ab0._0_4_ + iVar258 * 0x24;
                              local_ab0._8_8_ = auVar268._8_8_;
                            }
                            uVar210 = (ulong)(uint)((int)local_8d8 + iVar239);
                          }
                          if (local_738.refcount != (int *)0x0) {
                            LOCK();
                            *local_738.refcount = *local_738.refcount + -1;
                            UNLOCK();
                            if (*local_738.refcount == 0) {
                              if (local_738.allocator == (Allocator *)0x0) {
                                free(local_738.data);
                              }
                              else {
                                (*(local_738.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          pvVar204 = (void *)((long)local_858 + 1);
                        }
                      }
                      piVar255 = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
                      lVar200 = local_a40;
                      lVar208 = local_780;
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          auVar230 = (undefined1  [8])
                                     CONCAT44(local_810.data._4_4_,(int)local_810.data);
                          if (local_810.allocator == (Allocator *)0x0) {
LAB_001c8fc5:
                            free((void *)auVar230);
                            lVar200 = local_a40;
                            lVar208 = local_780;
                          }
                          else {
                            (*(local_810.allocator)->_vptr_Allocator[3])();
                            lVar200 = local_a40;
                            lVar208 = local_780;
                          }
                        }
                      }
                    }
                  }
                }
                piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
                local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                local_a40 = lVar200;
                local_780 = lVar208;
                if (piVar255 != (int *)0x0) {
                  LOCK();
                  *piVar255 = *piVar255 + -1;
                  UNLOCK();
                  local_a80 = piVar222;
                  if (*piVar255 == 0) {
                    if (local_8b0 == (Allocator *)0x0) goto LAB_001c2642;
                    (*local_8b0->_vptr_Allocator[3])();
                    local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                  }
                }
                goto LAB_001c264d;
              }
              piVar255 = (int *)(ulong)(uint)fVar220;
              if (bVar262) {
                uVar247 = top_blob->elempack * top_blob->c;
                uVar210 = (ulong)uVar247;
                uVar250 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
                uVar209 = (ulong)uVar250;
                uVar244 = local_920.elempack * local_920.c;
                pvVar204 = (void *)(ulong)uVar244;
                get_optimal_tile_mnk
                          (uVar247,uVar250,uVar244,&local_a84,(int *)&local_a88,&local_844,
                           (int)fVar220);
                iVar187 = local_844;
                uVar259 = local_a88;
                local_6c0 = (int)(uVar247 + local_a84 + -1) / local_a84;
                iVar257 = (int)(local_a88 + uVar250 + -1) / (int)local_a88;
                iVar188 = (int)(uVar244 + local_844 + -1) / local_844;
                local_890 = 0;
                iVar239 = local_844 * local_a88;
                local_8d0 = (undefined1  [8])0x0;
                fStack_8c8 = 0.0;
                uStack_8c4 = 0;
                local_8c0 = 0;
                uStack_8bf = 0;
                local_8b8 = 0.0;
                local_8b0 = (Allocator *)0x0;
                iStack_8a8 = 0;
                fStack_8a4 = 0.0;
                fStack_8a0 = 0.0;
                iStack_89c = 0;
                iStack_898 = 0;
                Mat::create((Mat *)local_8d0,iVar239,0x40,iVar188,iVar257,4,opt->workspace_allocator
                           );
                iVar189 = -100;
                local_858 = pvVar204;
                local_6d8 = uVar209;
                local_668 = uVar210;
                if ((local_8d0 != (undefined1  [8])0x0) && ((long)iStack_898 * local_890 != 0)) {
                  fVar248 = (float)(iVar257 * iVar188);
                  iVar239 = iVar239 * 0x40;
                  if (((int)(float)local_a80 < 2) || ((int)(float)local_a80 <= (int)fVar248)) {
                    local_620 = 0;
                    local_660 = (undefined1  [8])0x0;
                    afStack_658[0] = 0.0;
                    afStack_658[1] = 0.0;
                    uStack_650 = (pointer)0x0;
                    afStack_648[0] = 0.0;
                    local_640 = (Allocator *)0x0;
                    iStack_638 = 0;
                    fStack_634 = 0.0;
                    fStack_630 = 0.0;
                    iStack_62c = 0;
                    iStack_628 = 0;
                    Mat::create((Mat *)local_660,iVar239,1,(int)(float)local_a80,4,
                                opt->workspace_allocator);
                    if ((local_660 != (undefined1  [8])0x0) && ((long)iStack_628 * local_620 != 0))
                    {
                      fVar220 = 0.0;
                      if ((int)fVar248 < 1) {
                        fVar248 = fVar220;
                      }
                      while (fVar248 != fVar220) {
                        local_a40._4_4_ = 0;
                        local_a60._0_4_ = (float)((int)fVar220 % iVar188);
                        iVar257 = ((int)fVar220 / iVar188) * uVar259;
                        iVar239 = (int)(float)local_a60 * iVar187;
                        uVar244 = (int)local_6d8 - iVar257;
                        if ((int)uVar259 < (int)uVar244) {
                          uVar244 = uVar259;
                        }
                        iVar258 = (int)local_858 - iVar239;
                        if (iVar187 < iVar258) {
                          iVar258 = iVar187;
                        }
                        local_a40._0_4_ = fVar220;
                        iVar249 = get_omp_thread_num();
                        local_810.data =
                             (void *)((long)iVar249 * local_620 * (long)uStack_650 + (long)local_660
                                     );
                        local_810.refcount._0_4_ = 0;
                        local_810.refcount._4_4_ = 0;
                        local_810.elemsize = (size_t)uStack_650;
                        local_810.elempack = (int)afStack_648[0];
                        local_810.allocator = local_640;
                        local_810.w = (int)fStack_634;
                        local_810.h = (int)fStack_630;
                        local_810.d = 1;
                        local_810.c = iStack_62c;
                        local_810.dims = iStack_638 + -1;
                        local_810.cstep =
                             ((long)uStack_650 * (long)(int)fStack_630 * (long)(int)fStack_634 +
                              0xfU & 0xfffffffffffffff0) / (ulong)uStack_650;
                        if (iStack_638 == 4) {
                          local_810.cstep = (long)(int)fStack_630 * (long)(int)fStack_634;
                        }
                        conv3x3s1_winograd63_transform_input_tile
                                  (&local_920,&local_810,iVar257,uVar244,iVar239,iVar258,
                                   in_stack_fffffffffffff440);
                        local_738.elemsize = CONCAT71(uStack_8bf,local_8c0);
                        local_738.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                        local_738.data =
                             (void *)((long)local_8d0 +
                                     (uint)(float)local_a60 * local_738.elemsize * local_738.cstep +
                                     (long)((int)fVar220 / iVar188) * local_890 * local_738.elemsize
                                     );
                        local_738.refcount = (int *)0x0;
                        local_738.elempack = (int)local_8b8;
                        local_738.allocator = local_8b0;
                        local_738.dims = 2;
                        local_738.w = (int)fStack_8a4;
                        local_738.h = (int)fStack_8a0;
                        local_738.d = 1;
                        local_738.c = 1;
                        transpose_pack_B_tile
                                  (&local_810,&local_738,0x40,uVar244,iVar258,(int)local_738.cstep);
                        fVar220 = (float)((int)(float)local_a40 + 1);
                      }
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          if (local_640 == (Allocator *)0x0) goto LAB_001c8fe1;
                          (*local_640->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_001c8fe9;
                    }
                    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      if (*piVar255 == 0) {
                        auVar230 = local_660;
                        if (local_640 == (Allocator *)0x0) goto LAB_001cadc3;
                        (*local_640->_vptr_Allocator[3])();
                      }
                    }
                  }
                  else {
                    local_620 = 0;
                    local_660 = (undefined1  [8])0x0;
                    afStack_658[0] = 0.0;
                    afStack_658[1] = 0.0;
                    uStack_650 = (pointer)0x0;
                    afStack_648[0] = 0.0;
                    local_640 = (Allocator *)0x0;
                    iStack_638 = 0;
                    fStack_634 = 0.0;
                    fStack_630 = 0.0;
                    iStack_62c = 0;
                    iStack_628 = 0;
                    Mat::create((Mat *)local_660,iVar239,4,opt->workspace_allocator);
                    if ((local_660 == (undefined1  [8])0x0) || ((long)iStack_628 * local_620 == 0))
                    {
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          auVar230 = local_660;
                          if (local_640 == (Allocator *)0x0) goto LAB_001cadc3;
                          (*local_640->_vptr_Allocator[3])();
                        }
                      }
                    }
                    else {
                      fVar220 = 0.0;
                      if ((int)fVar248 < 1) {
                        fVar248 = fVar220;
                      }
                      for (; fVar248 != fVar220; fVar220 = (float)((int)fVar220 + 1)) {
                        iVar257 = ((int)fVar220 / iVar188) * uVar259;
                        iVar239 = (int)((long)(int)fVar220 % (long)iVar188) * iVar187;
                        uVar244 = (int)local_6d8 - iVar257;
                        if ((int)uVar259 < (int)uVar244) {
                          uVar244 = uVar259;
                        }
                        iVar258 = (int)local_858 - iVar239;
                        if (iVar187 < iVar258) {
                          iVar258 = iVar187;
                        }
                        conv3x3s1_winograd63_transform_input_tile
                                  (&local_920,(Mat *)local_660,iVar257,uVar244,iVar239,iVar258,
                                   in_stack_fffffffffffff440);
                        local_810.elemsize = CONCAT71(uStack_8bf,local_8c0);
                        local_810.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                        local_810.data =
                             (void *)((long)local_8d0 +
                                     ((long)(int)fVar220 % (long)iVar188 & 0xffffffffU) *
                                     local_810.elemsize * local_810.cstep +
                                     (long)((int)fVar220 / iVar188) * local_890 * local_810.elemsize
                                     );
                        local_810.refcount._0_4_ = 0;
                        local_810.refcount._4_4_ = 0;
                        local_810.elempack = (int)local_8b8;
                        local_810.allocator = local_8b0;
                        local_810.dims = 2;
                        local_810.w = (int)fStack_8a4;
                        local_810.h = (int)fStack_8a0;
                        local_810.d = 1;
                        local_810.c = 1;
                        transpose_pack_B_tile
                                  ((Mat *)local_660,&local_810,0x40,uVar244,iVar258,
                                   (int)local_810.cstep);
                      }
                      piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          if (local_640 == (Allocator *)0x0) {
LAB_001c8fe1:
                            free((void *)local_660);
                          }
                          else {
                            (*local_640->_vptr_Allocator[3])();
                          }
                        }
                      }
LAB_001c8fe9:
                      local_810.cstep = 0;
                      local_810.data._0_4_ = 0;
                      local_810.data._4_4_ = 0;
                      local_810.refcount._0_4_ = 0;
                      local_810.refcount._4_4_ = 0;
                      local_810.elemsize = 0;
                      local_810.elempack = 0;
                      local_810.allocator = (Allocator *)0x0;
                      local_810.dims = 0;
                      local_810.w = 0;
                      local_810.h = 0;
                      local_810.d = 0;
                      local_810.c = 0;
                      Mat::create(&local_810,local_a88 * local_a84 * 0x40,1,(int)(float)local_a80,4,
                                  opt->workspace_allocator);
                      iVar189 = -100;
                      if ((CONCAT44(local_810.data._4_4_,(int)local_810.data) != 0) &&
                         ((long)local_810.c * local_810.cstep != 0)) {
                        if (local_6c0 < 1) {
                          local_6c0 = 0;
                        }
                        iVar187 = 0;
                        while (iVar257 = local_a84, iVar189 = 0, iVar187 != local_6c0) {
                          local_6bc = iVar187;
                          iVar187 = get_omp_thread_num();
                          local_738.data =
                               (void *)((long)iVar187 * local_810.cstep * local_810.elemsize +
                                       CONCAT44(local_810.data._4_4_,(int)local_810.data));
                          local_738.refcount = (int *)0x0;
                          local_738.elemsize = local_810.elemsize;
                          local_738.elempack = local_810.elempack;
                          local_738.allocator = local_810.allocator;
                          local_738.w = local_810.w;
                          local_738.h = local_810.h;
                          local_738.c = local_810.d;
                          local_738.d = 1;
                          local_738.dims = local_810.dims + -1;
                          local_738.cstep =
                               (local_810.elemsize * (long)local_810.h * (long)local_810.w + 0xf &
                               0xfffffffffffffff0) / local_810.elemsize;
                          if (local_810.dims == 4) {
                            local_738.cstep = (long)local_810.h * (long)local_810.w;
                          }
                          uVar259 = iVar257 * local_6bc;
                          local_928 = (void *)(ulong)uVar259;
                          iVar187 = (int)local_668 - uVar259;
                          if (iVar257 < iVar187) {
                            iVar187 = iVar257;
                          }
                          local_9c8 = (void *)(long)(int)uVar259;
                          local_670 = CONCAT44(local_670._4_4_,iVar187);
                          local_6f0._0_8_ = (long)iVar187;
                          iVar187 = 0;
                          while (iVar188 = local_844, iVar257 = local_a84, uVar244 = local_a88,
                                uVar259 = (int)local_6d8 - iVar187,
                                uVar259 != 0 && iVar187 <= (int)local_6d8) {
                            local_780._4_4_ = 0;
                            if ((int)local_a88 < (int)uVar259) {
                              uVar259 = local_a88;
                            }
                            local_818 = (ulong)uVar259;
                            iVar239 = 0;
                            uVar210 = (ulong)local_858 & 0xffffffff;
                            local_780._0_4_ = iVar187;
                            while( true ) {
                              iVar249 = (int)uVar210;
                              iVar258 = (int)local_818;
                              iVar187 = (int)local_928;
                              if ((int)local_858 <= iVar239) break;
                              iVar189 = iVar249;
                              if (iVar188 < iVar249) {
                                iVar189 = iVar188;
                              }
                              fStack_634 = (float)(this->weight_winograd63_data).w;
                              fStack_630 = (float)(this->weight_winograd63_data).h;
                              uStack_650 = (pointer)(this->weight_winograd63_data).elemsize;
                              afStack_648[0] = (float)(this->weight_winograd63_data).elempack;
                              local_640 = (this->weight_winograd63_data).allocator;
                              local_620 = (long)(int)fStack_630 * (long)(int)fStack_634;
                              local_660 = (undefined1  [8])
                                          ((long)(this->weight_winograd63_data).data +
                                          (long)uStack_650 * local_620 * (long)(iVar239 / iVar188) +
                                          (long)(int)((long)((ulong)(uint)(iVar187 >> 0x1f) << 0x20
                                                            | (ulong)local_928 & 0xffffffff) /
                                                     (long)iVar257) *
                                          (this->weight_winograd63_data).cstep * (long)uStack_650);
                              afStack_658[0] = 0.0;
                              afStack_658[1] = 0.0;
                              local_6b8.dims = 2;
                              iStack_62c = 1;
                              iStack_628 = 1;
                              local_6b8.elemsize = CONCAT71(uStack_8bf,local_8c0);
                              local_6b8.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                              local_6b8.data =
                                   (void *)((long)local_8d0 +
                                           local_6b8.cstep * local_6b8.elemsize *
                                           (long)(iVar239 / iVar188) +
                                           (long)((int)local_780 / (int)uVar244) * local_890 *
                                           local_6b8.elemsize);
                              local_6b8.refcount = (int *)0x0;
                              local_6b8.elempack = (int)local_8b8;
                              local_6b8.allocator = local_8b0;
                              local_6b8.w = (int)fStack_8a4;
                              local_6b8.h = (int)fStack_8a0;
                              local_6b8.d = 1;
                              local_6b8.c = 1;
                              iStack_638 = local_6b8.dims;
                              gemm_transB_packed_tile
                                        ((Mat *)local_660,&local_6b8,&local_738,0x40,(int)local_670,
                                         iVar258,iVar239,iVar189);
                              iVar239 = iVar239 + iVar188;
                              uVar210 = (ulong)(uint)-(iVar188 - iVar249);
                            }
                            iVar257 = top_blob->w;
                            lVar234 = (long)top_blob->h;
                            local_7c0._0_8_ = lVar234;
                            iVar188 = top_blob->elempack;
                            iVar189 = (int)top_blob->cstep * iVar188;
                            local_760 = (iVar257 + 5) / 6;
                            iVar190 = iVar258 * 0x40;
                            lVar200 = (long)(iVar258 * 8);
                            iVar249 = iVar189 * 2;
                            iVar239 = iVar189 * 3;
                            local_a60._0_4_ = (float)(iVar189 * 4);
                            local_a60._4_4_ = (int)(float)local_a60 >> 0x1f;
                            local_a80._0_4_ = (float)(iVar189 * 5);
                            local_a80._4_4_ = (int)(float)local_a80 >> 0x1f;
                            local_a20._0_4_ = iVar189 * 6;
                            local_a20._4_4_ = (int)local_a20 >> 0x1f;
                            lVar208 = (long)(iVar189 * 7);
                            local_a00._0_8_ = lVar208;
                            local_a40._0_4_ = (float)(iVar188 * iVar257);
                            iVar192 = 0;
                            uVar210 = 0;
                            if (0 < iVar258) {
                              uVar210 = local_818 & 0xffffffff;
                            }
                            local_840._0_4_ = (uint)uVar210;
                            local_840._4_4_ = 0;
                            local_a40._4_4_ = (int)(float)local_a40 >> 0x1f;
                            local_6d0 = (long)(iVar258 * 0x38) * 4;
                            local_6c8 = CONCAT44(local_6c8._4_4_,iVar258 * 0x200);
                            local_6e0 = (undefined1 (*) [32])CONCAT44(local_6e0._4_4_,iVar190);
                            local_798 = (void *)((long)(iVar258 * 0x30) * 4);
                            local_790 = (long)(iVar258 * 0x28) * 4;
                            lVar201 = (long)(iVar258 << 5) * 4;
                            local_850 = (void *)((long)(iVar258 * 0x18) * 4);
                            lVar256 = (long)(iVar258 << 4) * 4;
                            local_8d8 = (this->super_Convolution).bias_data.data;
                            local_788 = (void *)((long)local_8d8 + (long)local_9c8 * 4);
                            for (uVar209 = 0; (long)(uVar209 | 7) < (long)local_6f0._0_8_;
                                uVar209 = uVar209 + 8) {
                              if (local_8d8 == (void *)0x0) {
                                fVar248 = 0.0;
                                fVar220 = 0.0;
                                fVar864 = 0.0;
                                fVar865 = 0.0;
                                fVar866 = 0.0;
                                fVar867 = 0.0;
                                fVar868 = 0.0;
                                fVar869 = 0.0;
                              }
                              else {
                                pfVar197 = (float *)((long)local_788 + uVar209 * 4);
                                fVar248 = *pfVar197;
                                fVar220 = pfVar197[1];
                                fVar864 = pfVar197[2];
                                fVar865 = pfVar197[3];
                                fVar866 = pfVar197[4];
                                fVar867 = pfVar197[5];
                                fVar868 = pfVar197[6];
                                fVar869 = pfVar197[7];
                              }
                              lVar216 = (long)iVar192;
                              lVar215 = 0;
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                lVar202 = (long)local_738.data + lVar215;
                                for (lVar217 = -0x100; lVar217 != 0; lVar217 = lVar217 + 0x20) {
                                  auVar376 = *(undefined1 (*) [32])
                                              (lVar202 + lVar200 * 4 + lVar216 * 4);
                                  auVar1215 = *(undefined1 (*) [32])
                                               (lVar202 + lVar256 + lVar216 * 4);
                                  auVar1449 = *(undefined1 (*) [32])
                                               ((long)local_850 + lVar202 + lVar216 * 4);
                                  auVar1485 = *(undefined1 (*) [32])
                                               (lVar202 + lVar201 + lVar216 * 4);
                                  auVar613 = *(undefined1 (*) [32])
                                              (lVar202 + local_790 + lVar216 * 4);
                                  auVar593 = *(undefined1 (*) [32])
                                              ((long)local_798 + lVar202 + lVar216 * 4);
                                  auVar1004._0_4_ = auVar1215._0_4_ + auVar376._0_4_;
                                  auVar1004._4_4_ = auVar1215._4_4_ + auVar376._4_4_;
                                  auVar1004._8_4_ = auVar1215._8_4_ + auVar376._8_4_;
                                  auVar1004._12_4_ = auVar1215._12_4_ + auVar376._12_4_;
                                  auVar1004._16_4_ = auVar1215._16_4_ + auVar376._16_4_;
                                  auVar1004._20_4_ = auVar1215._20_4_ + auVar376._20_4_;
                                  auVar1004._24_4_ = auVar1215._24_4_ + auVar376._24_4_;
                                  auVar1004._28_4_ = auVar1215._28_4_ + auVar376._28_4_;
                                  auVar376 = vsubps_avx(auVar376,auVar1215);
                                  auVar505._0_4_ = auVar1485._0_4_ + auVar1449._0_4_;
                                  auVar505._4_4_ = auVar1485._4_4_ + auVar1449._4_4_;
                                  auVar505._8_4_ = auVar1485._8_4_ + auVar1449._8_4_;
                                  auVar505._12_4_ = auVar1485._12_4_ + auVar1449._12_4_;
                                  auVar505._16_4_ = auVar1485._16_4_ + auVar1449._16_4_;
                                  auVar505._20_4_ = auVar1485._20_4_ + auVar1449._20_4_;
                                  auVar505._24_4_ = auVar1485._24_4_ + auVar1449._24_4_;
                                  auVar505._28_4_ = auVar1485._28_4_ + auVar1449._28_4_;
                                  auVar1215 = vsubps_avx(auVar1449,auVar1485);
                                  auVar745._0_4_ = auVar593._0_4_ + auVar613._0_4_;
                                  auVar745._4_4_ = auVar593._4_4_ + auVar613._4_4_;
                                  auVar745._8_4_ = auVar593._8_4_ + auVar613._8_4_;
                                  auVar745._12_4_ = auVar593._12_4_ + auVar613._12_4_;
                                  auVar745._16_4_ = auVar593._16_4_ + auVar613._16_4_;
                                  auVar745._20_4_ = auVar593._20_4_ + auVar613._20_4_;
                                  auVar745._24_4_ = auVar593._24_4_ + auVar613._24_4_;
                                  auVar745._28_4_ = auVar593._28_4_ + auVar613._28_4_;
                                  auVar1449 = vsubps_avx(auVar613,auVar593);
                                  pfVar197 = (float *)(lVar202 + lVar216 * 4);
                                  auVar1377._8_4_ = 0x42000000;
                                  auVar1377._0_8_ = 0x4200000042000000;
                                  auVar1377._12_4_ = 0x42000000;
                                  auVar1377._16_4_ = 0x42000000;
                                  auVar1377._20_4_ = 0x42000000;
                                  auVar1377._24_4_ = 0x42000000;
                                  auVar1377._28_4_ = 0x42000000;
                                  auVar268 = vfmadd213ps_fma(auVar1377,auVar745,auVar505);
                                  auVar933._0_4_ = auVar268._0_4_ + auVar1004._0_4_ + *pfVar197;
                                  auVar933._4_4_ = auVar268._4_4_ + auVar1004._4_4_ + pfVar197[1];
                                  auVar933._8_4_ = auVar268._8_4_ + auVar1004._8_4_ + pfVar197[2];
                                  auVar933._12_4_ = auVar268._12_4_ + auVar1004._12_4_ + pfVar197[3]
                                  ;
                                  auVar933._16_4_ = auVar1004._16_4_ + pfVar197[4] + 0.0;
                                  auVar933._20_4_ = auVar1004._20_4_ + pfVar197[5] + 0.0;
                                  auVar933._24_4_ = auVar1004._24_4_ + pfVar197[6] + 0.0;
                                  auVar933._28_4_ = auVar1004._28_4_ + pfVar197[7] + 0.0;
                                  auVar1450._8_4_ = 0x40000000;
                                  auVar1450._0_8_ = 0x4000000040000000;
                                  auVar1450._12_4_ = 0x40000000;
                                  auVar1450._16_4_ = 0x40000000;
                                  auVar1450._20_4_ = 0x40000000;
                                  auVar1450._24_4_ = 0x40000000;
                                  auVar1450._28_4_ = 0x40000000;
                                  auVar268 = vfmadd213ps_fma(auVar1450,auVar1215,auVar376);
                                  auVar1486._8_4_ = 0x41800000;
                                  auVar1486._0_8_ = 0x4180000041800000;
                                  auVar1486._12_4_ = 0x41800000;
                                  auVar1486._16_4_ = 0x41800000;
                                  auVar1486._20_4_ = 0x41800000;
                                  auVar1486._24_4_ = 0x41800000;
                                  auVar1486._28_4_ = 0x41800000;
                                  auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1486)
                                  ;
                                  auVar1302._8_4_ = 0x40800000;
                                  auVar1302._0_8_ = 0x4080000040800000;
                                  auVar1302._12_4_ = 0x40800000;
                                  auVar1302._16_4_ = 0x40800000;
                                  auVar1302._20_4_ = 0x40800000;
                                  auVar1302._24_4_ = 0x40800000;
                                  auVar1302._28_4_ = 0x40800000;
                                  auVar268 = vfmadd213ps_fma(auVar1302,auVar505,auVar1004);
                                  auVar1216._8_4_ = 0x41000000;
                                  auVar1216._0_8_ = 0x4100000041000000;
                                  auVar1216._12_4_ = 0x41000000;
                                  auVar1216._16_4_ = 0x41000000;
                                  auVar1216._20_4_ = 0x41000000;
                                  auVar1216._24_4_ = 0x41000000;
                                  auVar1216._28_4_ = 0x41000000;
                                  auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar745,auVar1216);
                                  auVar268 = vfmadd213ps_fma(auVar1216,auVar1215,auVar376);
                                  auVar309 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1302)
                                  ;
                                  auVar268 = vfmadd213ps_fma(auVar505,auVar1486,auVar1004);
                                  auVar534 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1450,auVar745);
                                  pfVar197 = (float *)(lVar202 + local_6d0 + lVar216 * 4);
                                  auVar268 = vfmadd213ps_fma(auVar1215,auVar1377,auVar1449);
                                  auVar398._0_4_ = auVar376._0_4_ + *pfVar197 + auVar268._0_4_;
                                  auVar398._4_4_ = auVar376._4_4_ + pfVar197[1] + auVar268._4_4_;
                                  auVar398._8_4_ = auVar376._8_4_ + pfVar197[2] + auVar268._8_4_;
                                  auVar398._12_4_ = auVar376._12_4_ + pfVar197[3] + auVar268._12_4_;
                                  auVar398._16_4_ = auVar376._16_4_ + pfVar197[4] + 0.0;
                                  auVar398._20_4_ = auVar376._20_4_ + pfVar197[5] + 0.0;
                                  auVar398._24_4_ = auVar376._24_4_ + pfVar197[6] + 0.0;
                                  auVar398._28_4_ = auVar376._28_4_ + pfVar197[7] + 0.0;
                                  *(undefined1 (*) [32])((long)auStack_560 + lVar217) = auVar933;
                                  *(undefined1 (*) [32])(auStack_460 + lVar217) = ZEXT1632(auVar310)
                                  ;
                                  *(undefined1 (*) [32])(auStack_360 + lVar217) = ZEXT1632(auVar945)
                                  ;
                                  *(undefined1 (*) [32])(auStack_260 + lVar217) = ZEXT1632(auVar309)
                                  ;
                                  *(undefined1 (*) [32])(auStack_160 + lVar217) = ZEXT1632(auVar534)
                                  ;
                                  *(undefined1 (*) [32])(auStack_60 + lVar217) = auVar398;
                                  lVar202 = lVar202 + (long)iVar190 * 4;
                                }
                                iVar207 = (int)uVar229 + (int)local_780;
                                lVar202 = (long)((iVar207 / local_760) * 6);
                                iVar221 = (iVar207 % local_760) * 6;
                                pauVar236 = (undefined1 (*) [32])
                                            ((long)top_blob->data +
                                            (long)(iVar221 * iVar188) * 4 +
                                            (long)top_blob->w * top_blob->elemsize * lVar202 +
                                            (long)((iVar187 + (int)uVar209) / iVar188) *
                                            top_blob->cstep * top_blob->elemsize);
                                iVar207 = iVar221 + 1;
                                local_880._0_4_ = iVar207;
                                iVar193 = iVar221 + 2;
                                local_9a0._0_4_ = iVar193;
                                iVar191 = iVar221 + 3;
                                local_960._0_4_ = iVar191;
                                iVar194 = iVar221 + 4;
                                local_980._0_4_ = iVar194;
                                iVar221 = iVar221 + 5;
                                auVar183._24_8_ = 0;
                                auVar183._0_24_ = stack0xfffffffffffff648;
                                _local_9c0 = auVar183 << 0x40;
                                pfVar197 = local_580;
                                for (lVar217 = 0; lVar217 != 6; lVar217 = lVar217 + 1) {
                                  if (lVar217 < lVar234 - lVar202) {
                                    auVar376 = *(undefined1 (*) [32])(pfVar197 + -0x30);
                                    auVar1215 = *(undefined1 (*) [32])(pfVar197 + -0x28);
                                    auVar1449 = *(undefined1 (*) [32])(pfVar197 + -0x20);
                                    auVar1485 = *(undefined1 (*) [32])(pfVar197 + -0x18);
                                    auVar613 = *(undefined1 (*) [32])(pfVar197 + -0x10);
                                    auVar593 = *(undefined1 (*) [32])(pfVar197 + -8);
                                    auVar1058._0_4_ = auVar1215._0_4_ + auVar376._0_4_;
                                    auVar1058._4_4_ = auVar1215._4_4_ + auVar376._4_4_;
                                    auVar1058._8_4_ = auVar1215._8_4_ + auVar376._8_4_;
                                    auVar1058._12_4_ = auVar1215._12_4_ + auVar376._12_4_;
                                    auVar1058._16_4_ = auVar1215._16_4_ + auVar376._16_4_;
                                    auVar1058._20_4_ = auVar1215._20_4_ + auVar376._20_4_;
                                    auVar1058._24_4_ = auVar1215._24_4_ + auVar376._24_4_;
                                    auVar1058._28_4_ = auVar1215._28_4_ + auVar376._28_4_;
                                    auVar376 = vsubps_avx(auVar376,auVar1215);
                                    auVar506._0_4_ = auVar1485._0_4_ + auVar1449._0_4_;
                                    auVar506._4_4_ = auVar1485._4_4_ + auVar1449._4_4_;
                                    auVar506._8_4_ = auVar1485._8_4_ + auVar1449._8_4_;
                                    auVar506._12_4_ = auVar1485._12_4_ + auVar1449._12_4_;
                                    auVar506._16_4_ = auVar1485._16_4_ + auVar1449._16_4_;
                                    auVar506._20_4_ = auVar1485._20_4_ + auVar1449._20_4_;
                                    auVar506._24_4_ = auVar1485._24_4_ + auVar1449._24_4_;
                                    auVar506._28_4_ = auVar1485._28_4_ + auVar1449._28_4_;
                                    auVar1215 = vsubps_avx(auVar1449,auVar1485);
                                    auVar1128._0_4_ = auVar593._0_4_ + auVar613._0_4_;
                                    auVar1128._4_4_ = auVar593._4_4_ + auVar613._4_4_;
                                    auVar1128._8_4_ = auVar593._8_4_ + auVar613._8_4_;
                                    auVar1128._12_4_ = auVar593._12_4_ + auVar613._12_4_;
                                    auVar1128._16_4_ = auVar593._16_4_ + auVar613._16_4_;
                                    auVar1128._20_4_ = auVar593._20_4_ + auVar613._20_4_;
                                    auVar1128._24_4_ = auVar593._24_4_ + auVar613._24_4_;
                                    auVar1128._28_4_ = auVar593._28_4_ + auVar613._28_4_;
                                    auVar1449 = vsubps_avx(auVar613,auVar593);
                                    auVar1451._8_4_ = 0x42000000;
                                    auVar1451._0_8_ = 0x4200000042000000;
                                    auVar1451._12_4_ = 0x42000000;
                                    auVar1451._16_4_ = 0x42000000;
                                    auVar1451._20_4_ = 0x42000000;
                                    auVar1451._24_4_ = 0x42000000;
                                    auVar1451._28_4_ = 0x42000000;
                                    auVar268 = vfmadd213ps_fma(auVar1451,auVar1128,auVar506);
                                    auVar888._0_4_ =
                                         auVar1058._0_4_ + fVar248 + pfVar197[-0x38] +
                                         auVar268._0_4_;
                                    auVar888._4_4_ =
                                         auVar1058._4_4_ + fVar220 + pfVar197[-0x37] +
                                         auVar268._4_4_;
                                    auVar888._8_4_ =
                                         auVar1058._8_4_ + fVar864 + pfVar197[-0x36] +
                                         auVar268._8_4_;
                                    auVar888._12_4_ =
                                         auVar1058._12_4_ + fVar865 + pfVar197[-0x35] +
                                         auVar268._12_4_;
                                    auVar934._16_4_ =
                                         auVar1058._16_4_ + fVar866 + pfVar197[-0x34] + 0.0;
                                    auVar934._0_16_ = auVar888;
                                    auVar934._20_4_ =
                                         auVar1058._20_4_ + fVar867 + pfVar197[-0x33] + 0.0;
                                    auVar934._24_4_ =
                                         auVar1058._24_4_ + fVar868 + pfVar197[-0x32] + 0.0;
                                    auVar934._28_4_ =
                                         auVar1058._28_4_ + fVar869 + pfVar197[-0x31] + 0.0;
                                    auVar1487._8_4_ = 0x40000000;
                                    auVar1487._0_8_ = 0x4000000040000000;
                                    auVar1487._12_4_ = 0x40000000;
                                    auVar1487._16_4_ = 0x40000000;
                                    auVar1487._20_4_ = 0x40000000;
                                    auVar1487._24_4_ = 0x40000000;
                                    auVar1487._28_4_ = 0x40000000;
                                    auVar268 = vfmadd213ps_fma(auVar1487,auVar1215,auVar376);
                                    auVar305._8_4_ = 0x41800000;
                                    auVar305._0_8_ = 0x4180000041800000;
                                    auVar305._12_4_ = 0x41800000;
                                    auVar305._16_4_ = 0x41800000;
                                    auVar305._20_4_ = 0x41800000;
                                    auVar305._24_4_ = 0x41800000;
                                    auVar305._28_4_ = 0x41800000;
                                    auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar305
                                                              );
                                    auVar802._0_4_ = fVar248 + auVar268._0_4_;
                                    auVar802._4_4_ = fVar220 + auVar268._4_4_;
                                    auVar802._8_4_ = fVar864 + auVar268._8_4_;
                                    auVar802._12_4_ = fVar865 + auVar268._12_4_;
                                    auVar863._16_4_ = fVar866 + 0.0;
                                    auVar863._0_16_ = auVar802;
                                    auVar863._20_4_ = fVar867 + 0.0;
                                    auVar863._24_4_ = fVar868 + 0.0;
                                    auVar863._28_4_ = fVar869 + 0.0;
                                    auVar1303._8_4_ = 0x40800000;
                                    auVar1303._0_8_ = 0x4080000040800000;
                                    auVar1303._12_4_ = 0x40800000;
                                    auVar1303._16_4_ = 0x40800000;
                                    auVar1303._20_4_ = 0x40800000;
                                    auVar1303._24_4_ = 0x40800000;
                                    auVar1303._28_4_ = 0x40800000;
                                    auVar268 = vfmadd213ps_fma(auVar1303,auVar506,auVar1058);
                                    auVar1378._8_4_ = 0x41000000;
                                    auVar1378._0_8_ = 0x4100000041000000;
                                    auVar1378._12_4_ = 0x41000000;
                                    auVar1378._16_4_ = 0x41000000;
                                    auVar1378._20_4_ = 0x41000000;
                                    auVar1378._24_4_ = 0x41000000;
                                    auVar1378._28_4_ = 0x41000000;
                                    auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1128,
                                                               auVar1378);
                                    auVar669._0_4_ = fVar248 + auVar268._0_4_;
                                    auVar669._4_4_ = fVar220 + auVar268._4_4_;
                                    auVar669._8_4_ = fVar864 + auVar268._8_4_;
                                    auVar669._12_4_ = fVar865 + auVar268._12_4_;
                                    auVar746._16_4_ = fVar866 + 0.0;
                                    auVar746._0_16_ = auVar669;
                                    auVar746._20_4_ = fVar867 + 0.0;
                                    auVar746._24_4_ = fVar868 + 0.0;
                                    auVar746._28_4_ = fVar869 + 0.0;
                                    auVar268 = vfmadd213ps_fma(auVar1378,auVar1215,auVar376);
                                    auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,
                                                               auVar1303);
                                    auVar535._0_4_ = fVar248 + auVar268._0_4_;
                                    auVar535._4_4_ = fVar220 + auVar268._4_4_;
                                    auVar535._8_4_ = fVar864 + auVar268._8_4_;
                                    auVar535._12_4_ = fVar865 + auVar268._12_4_;
                                    auVar617._16_4_ = fVar866 + 0.0;
                                    auVar617._0_16_ = auVar535;
                                    auVar617._20_4_ = fVar867 + 0.0;
                                    auVar617._24_4_ = fVar868 + 0.0;
                                    auVar617._28_4_ = fVar869 + 0.0;
                                    auVar268 = vfmadd213ps_fma(auVar506,auVar305,auVar1058);
                                    auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1487,
                                                               auVar1128);
                                    auVar430._0_4_ = fVar248 + auVar268._0_4_;
                                    auVar430._4_4_ = fVar220 + auVar268._4_4_;
                                    auVar430._8_4_ = fVar864 + auVar268._8_4_;
                                    auVar430._12_4_ = fVar865 + auVar268._12_4_;
                                    auVar507._16_4_ = fVar866 + 0.0;
                                    auVar507._0_16_ = auVar430;
                                    auVar507._20_4_ = fVar867 + 0.0;
                                    auVar507._24_4_ = fVar868 + 0.0;
                                    auVar507._28_4_ = fVar869 + 0.0;
                                    auVar268 = vfmadd213ps_fma(auVar1215,auVar1451,auVar1449);
                                    auVar353._0_4_ =
                                         fVar248 + auVar376._0_4_ + *pfVar197 + auVar268._0_4_;
                                    auVar353._4_4_ =
                                         fVar220 + auVar376._4_4_ + pfVar197[1] + auVar268._4_4_;
                                    auVar353._8_4_ =
                                         fVar864 + auVar376._8_4_ + pfVar197[2] + auVar268._8_4_;
                                    auVar353._12_4_ =
                                         fVar865 + auVar376._12_4_ + pfVar197[3] + auVar268._12_4_;
                                    auVar399._16_4_ = fVar866 + auVar376._16_4_ + pfVar197[4] + 0.0;
                                    auVar399._0_16_ = auVar353;
                                    auVar399._20_4_ = fVar867 + auVar376._20_4_ + pfVar197[5] + 0.0;
                                    auVar399._24_4_ = fVar868 + auVar376._24_4_ + pfVar197[6] + 0.0;
                                    auVar399._28_4_ = fVar869 + auVar376._28_4_ + pfVar197[7] + 0.0;
                                    auVar668 = auVar934._16_16_;
                                    auVar534 = auVar863._16_16_;
                                    auVar309 = auVar746._16_16_;
                                    auVar945 = auVar617._16_16_;
                                    auVar310 = auVar507._16_16_;
                                    auVar268 = auVar399._16_16_;
                                    if (iVar188 == 1) {
                                      *(float *)*pauVar236 = auVar888._0_4_;
                                      uVar211 = vextractps_avx(auVar888,1);
                                      *(undefined4 *)(*pauVar236 + (long)iVar189 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar888,2);
                                      *(undefined4 *)(*pauVar236 + (long)iVar249 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar888,3);
                                      *(undefined4 *)(*pauVar236 + (long)iVar239 * 4) = uVar211;
                                      *(float *)(*pauVar236 + (long)(int)(float)local_a60 * 4) =
                                           auVar934._16_4_;
                                      uVar211 = vextractps_avx(auVar668,1);
                                      *(undefined4 *)(*pauVar236 + (long)(int)(float)local_a80 * 4)
                                           = uVar211;
                                      uVar211 = vextractps_avx(auVar668,2);
                                      *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4) =
                                           uVar211;
                                      uVar211 = vextractps_avx(auVar668,3);
                                      *(undefined4 *)(*pauVar236 + lVar208 * 4) = uVar211;
                                      if (iVar207 < iVar257) {
                                        *(float *)(*pauVar236 + 4) = auVar802._0_4_;
                                        uVar211 = vextractps_avx(auVar802,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar802,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar249 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar802,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar239 * 4 + 4) =
                                             uVar211;
                                        *(float *)(*pauVar236 + (long)(int)(float)local_a60 * 4 + 4)
                                             = auVar863._16_4_;
                                        uVar211 = vextractps_avx(auVar534,1);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)(float)local_a80 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar534,2);
                                        *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar534,3);
                                        *(undefined4 *)(*pauVar236 + lVar208 * 4 + 4) = uVar211;
                                      }
                                      if (iVar193 < iVar257) {
                                        *(float *)(*pauVar236 + 8) = auVar669._0_4_;
                                        uVar211 = vextractps_avx(auVar669,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar669,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar249 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar669,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar239 * 4 + 8) =
                                             uVar211;
                                        *(float *)(*pauVar236 + (long)(int)(float)local_a60 * 4 + 8)
                                             = auVar746._16_4_;
                                        uVar211 = vextractps_avx(auVar309,1);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)(float)local_a80 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar309,2);
                                        *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar309,3);
                                        *(undefined4 *)(*pauVar236 + lVar208 * 4 + 8) = uVar211;
                                      }
                                      if (iVar191 < iVar257) {
                                        *(float *)(*pauVar236 + 0xc) = auVar535._0_4_;
                                        uVar211 = vextractps_avx(auVar535,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar535,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar249 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar535,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar239 * 4 + 0xc) =
                                             uVar211;
                                        *(float *)(*pauVar236 +
                                                  (long)(int)(float)local_a60 * 4 + 0xc) =
                                             auVar617._16_4_;
                                        uVar211 = vextractps_avx(auVar945,1);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)(float)local_a80 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar945,2);
                                        *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4 + 0xc)
                                             = uVar211;
                                        uVar211 = vextractps_avx(auVar945,3);
                                        *(undefined4 *)(*pauVar236 + lVar208 * 4 + 0xc) = uVar211;
                                      }
                                      if (iVar194 < iVar257) {
                                        *(float *)(*pauVar236 + 0x10) = auVar430._0_4_;
                                        uVar211 = vextractps_avx(auVar430,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 0x10) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar430,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar249 * 4 + 0x10) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar430,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar239 * 4 + 0x10) =
                                             uVar211;
                                        *(float *)(*pauVar236 +
                                                  (long)(int)(float)local_a60 * 4 + 0x10) =
                                             auVar507._16_4_;
                                        uVar211 = vextractps_avx(auVar310,1);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)(float)local_a80 * 4 + 0x10) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar310,2);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)local_a20 * 4 + 0x10) = uVar211;
                                        uVar211 = vextractps_avx(auVar310,3);
                                        *(undefined4 *)(*pauVar236 + lVar208 * 4 + 0x10) = uVar211;
                                      }
                                      if (iVar221 < iVar257) {
                                        *(float *)(*pauVar236 + 0x14) = auVar353._0_4_;
                                        uVar211 = vextractps_avx(auVar353,1);
                                        *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 0x14) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar353,2);
                                        *(undefined4 *)(*pauVar236 + (long)iVar249 * 4 + 0x14) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar353,3);
                                        *(undefined4 *)(*pauVar236 + (long)iVar239 * 4 + 0x14) =
                                             uVar211;
                                        *(float *)(*pauVar236 +
                                                  (long)(int)(float)local_a60 * 4 + 0x14) =
                                             auVar399._16_4_;
                                        uVar211 = vextractps_avx(auVar268,1);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)(float)local_a80 * 4 + 0x14) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar268,2);
                                        *(undefined4 *)
                                         (*pauVar236 + (long)(int)local_a20 * 4 + 0x14) = uVar211;
                                        uVar211 = vextractps_avx(auVar268,3);
                                        *(undefined4 *)(*pauVar236 + lVar208 * 4 + 0x14) = uVar211;
                                      }
                                    }
                                    else if (iVar188 == 4) {
                                      *(undefined1 (*) [16])*pauVar236 = auVar888;
                                      *(undefined1 (*) [16])(*pauVar236 + (long)iVar189 * 4) =
                                           auVar668;
                                      if (iVar207 < iVar257) {
                                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar802;
                                        *(undefined1 (*) [16])
                                         (*pauVar236 + (long)iVar189 * 4 + 0x10) = auVar534;
                                      }
                                      if (iVar193 < iVar257) {
                                        *(undefined1 (*) [16])pauVar236[1] = auVar669;
                                        *(undefined1 (*) [16])(pauVar236[1] + (long)iVar189 * 4) =
                                             auVar309;
                                      }
                                      if (iVar191 < iVar257) {
                                        *(undefined1 (*) [16])(pauVar236[1] + 0x10) = auVar535;
                                        *(undefined1 (*) [16])
                                         (pauVar236[1] + (long)iVar189 * 4 + 0x10) = auVar945;
                                      }
                                      if (iVar194 < iVar257) {
                                        *(undefined1 (*) [16])pauVar236[2] = auVar430;
                                        *(undefined1 (*) [16])(pauVar236[2] + (long)iVar189 * 4) =
                                             auVar310;
                                      }
                                      if (iVar221 < iVar257) {
                                        *(undefined1 (*) [16])(pauVar236[2] + 0x10) = auVar353;
                                        *(undefined1 (*) [16])
                                         (pauVar236[2] + (long)iVar189 * 4 + 0x10) = auVar268;
                                      }
                                    }
                                    else if (iVar188 == 8) {
                                      *pauVar236 = auVar934;
                                      if (iVar207 < iVar257) {
                                        pauVar236[1] = auVar863;
                                      }
                                      if (iVar193 < iVar257) {
                                        pauVar236[2] = auVar746;
                                      }
                                      if (iVar191 < iVar257) {
                                        pauVar236[3] = auVar617;
                                      }
                                      if (iVar194 < iVar257) {
                                        pauVar236[4] = auVar507;
                                      }
                                      if (iVar221 < iVar257) {
                                        pauVar236[5] = auVar399;
                                      }
                                    }
                                    pauVar236 = (undefined1 (*) [32])
                                                (*pauVar236 + (long)(int)(float)local_a40 * 4);
                                  }
                                  pfVar197 = pfVar197 + 0x40;
                                }
                                lVar215 = lVar215 + 0x20;
                              }
                              iVar192 = iVar192 + iVar258 * 0x200;
                            }
                            lVar208 = (long)(iVar258 * 4);
                            local_9a0._0_8_ = lVar208;
                            for (; (long)(uVar209 | 3) < (long)local_6f0._0_8_;
                                uVar209 = uVar209 + 4) {
                              if (local_8d8 == (void *)0x0) {
                                fVar248 = 0.0;
                                fVar220 = 0.0;
                                fVar864 = 0.0;
                                fVar865 = 0.0;
                              }
                              else {
                                pfVar197 = (float *)((long)local_788 + uVar209 * 4);
                                fVar248 = *pfVar197;
                                fVar220 = pfVar197[1];
                                fVar864 = pfVar197[2];
                                fVar865 = pfVar197[3];
                              }
                              lVar216 = (long)iVar192;
                              iVar207 = iVar187 + (int)uVar209;
                              local_980._0_4_ = iVar207;
                              lVar215 = 0;
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                local_880._0_8_ = uVar229;
                                local_960._0_8_ = lVar215;
                                lVar217 = (long)local_738.data + lVar215;
                                for (lVar202 = -0x80; lVar202 != 0; lVar202 = lVar202 + 0x10) {
                                  auVar268 = *(undefined1 (*) [16])
                                              (lVar217 + lVar208 * 4 + lVar216 * 4);
                                  auVar310 = *(undefined1 (*) [16])
                                              (lVar217 + lVar200 * 4 + lVar216 * 4);
                                  auVar945 = *(undefined1 (*) [16])
                                              (lVar217 + (long)(iVar258 * 0xc) * 4 + lVar216 * 4);
                                  auVar309 = *(undefined1 (*) [16])(lVar217 + lVar256 + lVar216 * 4)
                                  ;
                                  auVar534 = *(undefined1 (*) [16])
                                              (lVar217 + (long)(iVar258 * 0x14) * 4 + lVar216 * 4);
                                  auVar668 = *(undefined1 (*) [16])
                                              ((long)local_850 + lVar217 + lVar216 * 4);
                                  auVar959._0_4_ = auVar310._0_4_ + auVar268._0_4_;
                                  auVar959._4_4_ = auVar310._4_4_ + auVar268._4_4_;
                                  auVar959._8_4_ = auVar310._8_4_ + auVar268._8_4_;
                                  auVar959._12_4_ = auVar310._12_4_ + auVar268._12_4_;
                                  auVar268 = vsubps_avx(auVar268,auVar310);
                                  auVar431._0_4_ = auVar309._0_4_ + auVar945._0_4_;
                                  auVar431._4_4_ = auVar309._4_4_ + auVar945._4_4_;
                                  auVar431._8_4_ = auVar309._8_4_ + auVar945._8_4_;
                                  auVar431._12_4_ = auVar309._12_4_ + auVar945._12_4_;
                                  auVar310 = vsubps_avx(auVar945,auVar309);
                                  auVar670._0_4_ = auVar668._0_4_ + auVar534._0_4_;
                                  auVar670._4_4_ = auVar668._4_4_ + auVar534._4_4_;
                                  auVar670._8_4_ = auVar668._8_4_ + auVar534._8_4_;
                                  auVar670._12_4_ = auVar668._12_4_ + auVar534._12_4_;
                                  auVar945 = vsubps_avx(auVar534,auVar668);
                                  pfVar197 = (float *)(lVar217 + lVar216 * 4);
                                  auVar1260._8_4_ = 0x42000000;
                                  auVar1260._0_8_ = 0x4200000042000000;
                                  auVar1260._12_4_ = 0x42000000;
                                  auVar309 = vfmadd213ps_fma(auVar1260,auVar670,auVar431);
                                  auVar889._0_4_ = auVar309._0_4_ + auVar959._0_4_ + *pfVar197;
                                  auVar889._4_4_ = auVar309._4_4_ + auVar959._4_4_ + pfVar197[1];
                                  auVar889._8_4_ = auVar309._8_4_ + auVar959._8_4_ + pfVar197[2];
                                  auVar889._12_4_ = auVar309._12_4_ + auVar959._12_4_ + pfVar197[3];
                                  auVar1334._8_4_ = 0x40000000;
                                  auVar1334._0_8_ = 0x4000000040000000;
                                  auVar1334._12_4_ = 0x40000000;
                                  auVar309 = vfmadd213ps_fma(auVar1334,auVar310,auVar268);
                                  auVar1406._8_4_ = 0x41800000;
                                  auVar1406._0_8_ = 0x4180000041800000;
                                  auVar1406._12_4_ = 0x41800000;
                                  auVar534 = vfmadd231ps_fma(auVar309,auVar945,auVar1406);
                                  auVar1469._8_4_ = 0x40800000;
                                  auVar1469._0_8_ = 0x4080000040800000;
                                  auVar1469._12_4_ = 0x40800000;
                                  auVar309 = vfmadd213ps_fma(auVar1469,auVar431,auVar959);
                                  auVar1169._8_4_ = 0x41000000;
                                  auVar1169._0_8_ = 0x4100000041000000;
                                  auVar1169._12_4_ = 0x41000000;
                                  auVar668 = vfmadd231ps_fma(auVar309,auVar670,auVar1169);
                                  auVar309 = vfmadd213ps_fma(auVar1169,auVar310,auVar268);
                                  auVar413 = vfmadd231ps_fma(auVar309,auVar945,auVar1469);
                                  auVar309 = vfmadd213ps_fma(auVar431,auVar1406,auVar959);
                                  auVar309 = vfmadd231ps_fma(auVar309,auVar1334,auVar670);
                                  pfVar197 = (float *)(lVar217 +
                                                      (long)(iVar258 * 0x1c) * 4 + lVar216 * 4);
                                  auVar310 = vfmadd213ps_fma(auVar310,auVar1260,auVar945);
                                  auVar354._0_4_ = auVar268._0_4_ + *pfVar197 + auVar310._0_4_;
                                  auVar354._4_4_ = auVar268._4_4_ + pfVar197[1] + auVar310._4_4_;
                                  auVar354._8_4_ = auVar268._8_4_ + pfVar197[2] + auVar310._8_4_;
                                  auVar354._12_4_ = auVar268._12_4_ + pfVar197[3] + auVar310._12_4_;
                                  *(undefined1 (*) [16])((long)local_5e0 + lVar202) = auVar889;
                                  *(undefined1 (*) [16])((long)auStack_560 + lVar202) = auVar534;
                                  *(undefined1 (*) [16])((long)auStack_4e0 + lVar202) = auVar668;
                                  *(undefined1 (*) [16])(auStack_460 + lVar202) = auVar413;
                                  *(undefined1 (*) [16])(auStack_3e0 + lVar202) = auVar309;
                                  *(undefined1 (*) [16])(auStack_360 + lVar202) = auVar354;
                                  lVar217 = lVar217 + lVar201;
                                }
                                iVar193 = (int)uVar229 + (int)local_780;
                                lVar202 = (long)((iVar193 / local_760) * 6);
                                iVar194 = (iVar193 % local_760) * 6;
                                pauVar226 = (undefined1 (*) [16])
                                            ((long)top_blob->data +
                                            (long)(iVar194 * iVar188) * 4 +
                                            (long)top_blob->w * top_blob->elemsize * lVar202 +
                                            (long)(iVar207 / iVar188) * top_blob->cstep *
                                            top_blob->elemsize);
                                local_a80._0_4_ = (float)(iVar194 + 1);
                                local_a20._0_4_ = iVar194 + 2;
                                iVar193 = iVar194 + 3;
                                local_a00._0_4_ = iVar193;
                                iVar191 = iVar194 + 4;
                                local_9c0._0_4_ = iVar191;
                                local_a60._0_4_ = (float)(iVar194 + 5);
                                local_a60._4_4_ = 0;
                                pfVar197 = local_600 + 4;
                                for (lVar217 = 0; lVar217 != 6; lVar217 = lVar217 + 1) {
                                  if (lVar217 < lVar234 - lVar202) {
                                    auVar268 = *(undefined1 (*) [16])(pfVar197 + -0x18);
                                    auVar310 = *(undefined1 (*) [16])(pfVar197 + -0x14);
                                    auVar945 = *(undefined1 (*) [16])(pfVar197 + -0x10);
                                    auVar309 = *(undefined1 (*) [16])(pfVar197 + -0xc);
                                    auVar534 = *(undefined1 (*) [16])(pfVar197 + -8);
                                    auVar668 = *(undefined1 (*) [16])(pfVar197 + -4);
                                    auVar1012._0_4_ = auVar310._0_4_ + auVar268._0_4_;
                                    auVar1012._4_4_ = auVar310._4_4_ + auVar268._4_4_;
                                    auVar1012._8_4_ = auVar310._8_4_ + auVar268._8_4_;
                                    auVar1012._12_4_ = auVar310._12_4_ + auVar268._12_4_;
                                    auVar268 = vsubps_avx(auVar268,auVar310);
                                    auVar432._0_4_ = auVar309._0_4_ + auVar945._0_4_;
                                    auVar432._4_4_ = auVar309._4_4_ + auVar945._4_4_;
                                    auVar432._8_4_ = auVar309._8_4_ + auVar945._8_4_;
                                    auVar432._12_4_ = auVar309._12_4_ + auVar945._12_4_;
                                    auVar310 = vsubps_avx(auVar945,auVar309);
                                    auVar1093._0_4_ = auVar668._0_4_ + auVar534._0_4_;
                                    auVar1093._4_4_ = auVar668._4_4_ + auVar534._4_4_;
                                    auVar1093._8_4_ = auVar668._8_4_ + auVar534._8_4_;
                                    auVar1093._12_4_ = auVar668._12_4_ + auVar534._12_4_;
                                    auVar945 = vsubps_avx(auVar534,auVar668);
                                    auVar1261._8_4_ = 0x42000000;
                                    auVar1261._0_8_ = 0x4200000042000000;
                                    auVar1261._12_4_ = 0x42000000;
                                    auVar309 = vfmadd213ps_fma(auVar1261,auVar1093,auVar432);
                                    auVar890._0_4_ =
                                         auVar1012._0_4_ + fVar248 + pfVar197[-0x1c] +
                                         auVar309._0_4_;
                                    auVar890._4_4_ =
                                         auVar1012._4_4_ + fVar220 + pfVar197[-0x1b] +
                                         auVar309._4_4_;
                                    auVar890._8_4_ =
                                         auVar1012._8_4_ + fVar864 + pfVar197[-0x1a] +
                                         auVar309._8_4_;
                                    auVar890._12_4_ =
                                         auVar1012._12_4_ + fVar865 + pfVar197[-0x19] +
                                         auVar309._12_4_;
                                    auVar1335._8_4_ = 0x40000000;
                                    auVar1335._0_8_ = 0x4000000040000000;
                                    auVar1335._12_4_ = 0x40000000;
                                    auVar309 = vfmadd213ps_fma(auVar1335,auVar310,auVar268);
                                    auVar1407._8_4_ = 0x41800000;
                                    auVar1407._0_8_ = 0x4180000041800000;
                                    auVar1407._12_4_ = 0x41800000;
                                    auVar309 = vfmadd231ps_fma(auVar309,auVar945,auVar1407);
                                    auVar803._0_4_ = fVar248 + auVar309._0_4_;
                                    auVar803._4_4_ = fVar220 + auVar309._4_4_;
                                    auVar803._8_4_ = fVar864 + auVar309._8_4_;
                                    auVar803._12_4_ = fVar865 + auVar309._12_4_;
                                    auVar1470._8_4_ = 0x40800000;
                                    auVar1470._0_8_ = 0x4080000040800000;
                                    auVar1470._12_4_ = 0x40800000;
                                    auVar309 = vfmadd213ps_fma(auVar1470,auVar432,auVar1012);
                                    auVar281._8_4_ = 0x41000000;
                                    auVar281._0_8_ = 0x4100000041000000;
                                    auVar281._12_4_ = 0x41000000;
                                    auVar309 = vfmadd231ps_fma(auVar309,auVar1093,auVar281);
                                    auVar671._0_4_ = fVar248 + auVar309._0_4_;
                                    auVar671._4_4_ = fVar220 + auVar309._4_4_;
                                    auVar671._8_4_ = fVar864 + auVar309._8_4_;
                                    auVar671._12_4_ = fVar865 + auVar309._12_4_;
                                    auVar309 = vfmadd213ps_fma(auVar281,auVar310,auVar268);
                                    auVar309 = vfmadd231ps_fma(auVar309,auVar945,auVar1470);
                                    auVar536._0_4_ = fVar248 + auVar309._0_4_;
                                    auVar536._4_4_ = fVar220 + auVar309._4_4_;
                                    auVar536._8_4_ = fVar864 + auVar309._8_4_;
                                    auVar536._12_4_ = fVar865 + auVar309._12_4_;
                                    auVar309 = vfmadd213ps_fma(auVar432,auVar1407,auVar1012);
                                    auVar309 = vfmadd231ps_fma(auVar309,auVar1335,auVar1093);
                                    auVar433._0_4_ = fVar248 + auVar309._0_4_;
                                    auVar433._4_4_ = fVar220 + auVar309._4_4_;
                                    auVar433._8_4_ = fVar864 + auVar309._8_4_;
                                    auVar433._12_4_ = fVar865 + auVar309._12_4_;
                                    auVar310 = vfmadd213ps_fma(auVar310,auVar1261,auVar945);
                                    auVar355._0_4_ =
                                         fVar248 + auVar268._0_4_ + *pfVar197 + auVar310._0_4_;
                                    auVar355._4_4_ =
                                         fVar220 + auVar268._4_4_ + pfVar197[1] + auVar310._4_4_;
                                    auVar355._8_4_ =
                                         fVar864 + auVar268._8_4_ + pfVar197[2] + auVar310._8_4_;
                                    auVar355._12_4_ =
                                         fVar865 + auVar268._12_4_ + pfVar197[3] + auVar310._12_4_;
                                    if (iVar188 == 1) {
                                      *(float *)*pauVar226 = auVar890._0_4_;
                                      uVar211 = vextractps_avx(auVar890,1);
                                      *(undefined4 *)(*pauVar226 + (long)iVar189 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar890,2);
                                      *(undefined4 *)(*pauVar226 + (long)iVar249 * 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar890,3);
                                      *(undefined4 *)(*pauVar226 + (long)iVar239 * 4) = uVar211;
                                      if ((int)(float)local_a80 < iVar257) {
                                        *(float *)(*pauVar226 + 4) = auVar803._0_4_;
                                        uVar211 = vextractps_avx(auVar803,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar803,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar249 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar803,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar239 * 4 + 4) =
                                             uVar211;
                                      }
                                      if ((int)local_a20 < iVar257) {
                                        *(float *)(*pauVar226 + 8) = auVar671._0_4_;
                                        uVar211 = vextractps_avx(auVar671,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar671,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar249 * 4 + 8) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar671,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar239 * 4 + 8) =
                                             uVar211;
                                      }
                                      if (iVar193 < iVar257) {
                                        *(float *)(*pauVar226 + 0xc) = auVar536._0_4_;
                                        uVar211 = vextractps_avx(auVar536,1);
                                        *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar536,2);
                                        *(undefined4 *)(*pauVar226 + (long)iVar249 * 4 + 0xc) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar536,3);
                                        *(undefined4 *)(*pauVar226 + (long)iVar239 * 4 + 0xc) =
                                             uVar211;
                                      }
                                      if (iVar191 < iVar257) {
                                        *(float *)pauVar226[1] = auVar433._0_4_;
                                        uVar211 = vextractps_avx(auVar433,1);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar189 * 4) = uVar211;
                                        uVar211 = vextractps_avx(auVar433,2);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar249 * 4) = uVar211;
                                        uVar211 = vextractps_avx(auVar433,3);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar239 * 4) = uVar211;
                                      }
                                      if ((int)(float)local_a60 < iVar257) {
                                        *(float *)(pauVar226[1] + 4) = auVar355._0_4_;
                                        uVar211 = vextractps_avx(auVar355,1);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar189 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar355,2);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar249 * 4 + 4) =
                                             uVar211;
                                        uVar211 = vextractps_avx(auVar355,3);
                                        *(undefined4 *)(pauVar226[1] + (long)iVar239 * 4 + 4) =
                                             uVar211;
                                      }
                                    }
                                    else if (iVar188 == 4) {
                                      *pauVar226 = auVar890;
                                      if ((int)(float)local_a80 < iVar257) {
                                        pauVar226[1] = auVar803;
                                      }
                                      if ((int)local_a20 < iVar257) {
                                        pauVar226[2] = auVar671;
                                      }
                                      if (iVar193 < iVar257) {
                                        pauVar226[3] = auVar536;
                                      }
                                      if (iVar191 < iVar257) {
                                        pauVar226[4] = auVar433;
                                      }
                                      if ((int)(float)local_a60 < iVar257) {
                                        pauVar226[5] = auVar355;
                                      }
                                    }
                                    pauVar226 = (undefined1 (*) [16])
                                                (*pauVar226 + (long)(int)(float)local_a40 * 4);
                                  }
                                  pfVar197 = pfVar197 + 0x20;
                                }
                                lVar215 = lVar215 + 0x10;
                              }
                              iVar192 = iVar192 + iVar258 * 0x100;
                            }
                            lVar256 = (long)(iVar258 * 2);
                            lVar201 = (long)(iVar258 * 6);
                            local_a00._0_8_ = lVar256;
                            local_9c0._0_8_ = lVar201;
                            for (; (long)(uVar209 | 1) < (long)local_6f0._0_8_;
                                uVar209 = uVar209 + 2) {
                              lVar216 = uVar209 + (long)local_9c8;
                              if (local_8d8 == (void *)0x0) {
                                local_a80._0_4_ = 0.0;
                                local_a60._0_4_ = 0.0;
                              }
                              else {
                                local_a60._0_4_ = *(float *)((long)local_8d8 + lVar216 * 4);
                                local_a80._0_4_ = *(float *)((long)local_8d8 + lVar216 * 4 + 4);
                              }
                              pvVar204 = (void *)(lVar216 * top_blob->cstep * top_blob->elemsize +
                                                 (long)top_blob->data);
                              lVar216 = (long)top_blob->w * top_blob->elemsize;
                              local_980._0_8_ = lVar216;
                              puVar224 = (undefined8 *)((long)local_738.data + (long)iVar192 * 4);
                              local_960._0_8_ = pvVar204;
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                local_a20._0_4_ = (int)uVar229;
                                local_a20._4_4_ = (int)(uVar229 >> 0x20);
                                local_880._0_8_ = puVar224;
                                puVar214 = puVar224;
                                for (lVar215 = -8; lVar215 != 0; lVar215 = lVar215 + 1) {
                                  uVar196 = *(ulong *)((long)puVar214 + lVar256 * 4);
                                  auVar434._8_8_ = 0;
                                  auVar434._0_8_ = uVar196;
                                  uVar242 = *(ulong *)((long)puVar214 + lVar208 * 4);
                                  auVar537._8_8_ = 0;
                                  auVar537._0_8_ = uVar242;
                                  auVar672._0_4_ = (float)uVar242 + (float)uVar196;
                                  auVar672._4_4_ =
                                       (float)(uVar242 >> 0x20) + (float)(uVar196 >> 0x20);
                                  auVar672._8_8_ = 0;
                                  uVar196 = *(ulong *)((long)puVar214 + lVar201 * 4);
                                  auVar804._8_8_ = 0;
                                  auVar804._0_8_ = uVar196;
                                  uVar242 = *(ulong *)((long)puVar214 + lVar200 * 4);
                                  auVar891._8_8_ = 0;
                                  auVar891._0_8_ = uVar242;
                                  auVar960._0_4_ = (float)uVar242 + (float)uVar196;
                                  auVar960._4_4_ =
                                       (float)(uVar242 >> 0x20) + (float)(uVar196 >> 0x20);
                                  auVar960._8_8_ = 0;
                                  uVar196 = *(ulong *)((long)puVar214 + (long)(iVar258 * 10) * 4);
                                  auVar1013._8_8_ = 0;
                                  auVar1013._0_8_ = uVar196;
                                  uVar242 = *(ulong *)((long)puVar214 + (long)(iVar258 * 0xc) * 4);
                                  auVar1094._8_8_ = 0;
                                  auVar1094._0_8_ = uVar242;
                                  auVar1170._0_4_ = (float)uVar242 + (float)uVar196;
                                  auVar1170._4_4_ =
                                       (float)(uVar242 >> 0x20) + (float)(uVar196 >> 0x20);
                                  auVar1170._8_8_ = 0;
                                  auVar1336._0_4_ = auVar960._0_4_ + auVar672._0_4_;
                                  auVar1336._4_4_ = auVar960._4_4_ + auVar672._4_4_;
                                  auVar1336._8_8_ = 0;
                                  auVar282._8_4_ = 0x42000000;
                                  auVar282._0_8_ = 0x4200000042000000;
                                  auVar282._12_4_ = 0x42000000;
                                  auVar268 = vfmadd231ps_fma(auVar1336,auVar1170,auVar282);
                                  auVar1262._0_4_ = auVar268._0_4_ + (float)*puVar214;
                                  auVar1262._4_4_ =
                                       auVar268._4_4_ + (float)((ulong)*puVar214 >> 0x20);
                                  auVar1262._8_4_ = auVar268._8_4_ + 0.0;
                                  auVar1262._12_4_ = auVar268._12_4_ + 0.0;
                                  uVar266 = vmovlps_avx(auVar1262);
                                  *(undefined8 *)(afStack_618 + (lVar215 + -1) * 2) = uVar266;
                                  auVar268 = vsubps_avx(auVar434,auVar537);
                                  auVar310 = vsubps_avx(auVar804,auVar891);
                                  auVar945 = vsubps_avx(auVar1013,auVar1094);
                                  auVar356._8_4_ = 0x40000000;
                                  auVar356._0_8_ = 0x4000000040000000;
                                  auVar356._12_4_ = 0x40000000;
                                  auVar309 = vfmadd213ps_fma(auVar356,auVar310,auVar268);
                                  auVar1014._8_4_ = 0x41800000;
                                  auVar1014._0_8_ = 0x4180000041800000;
                                  auVar1014._12_4_ = 0x41800000;
                                  auVar309 = vfmadd231ps_fma(auVar309,auVar945,auVar1014);
                                  uVar266 = vmovlps_avx(auVar309);
                                  *(undefined8 *)(local_5e0 + lVar215 * 2) = uVar266;
                                  auVar1095._8_4_ = 0x40800000;
                                  auVar1095._0_8_ = 0x4080000040800000;
                                  auVar1095._12_4_ = 0x40800000;
                                  auVar309 = vfmadd213ps_fma(auVar1095,auVar960,auVar672);
                                  auVar1263._8_4_ = 0x41000000;
                                  auVar1263._0_8_ = 0x4100000041000000;
                                  auVar1263._12_4_ = 0x41000000;
                                  auVar309 = vfmadd231ps_fma(auVar309,auVar1170,auVar1263);
                                  uVar266 = vmovlps_avx(auVar309);
                                  *(undefined8 *)(local_5a0 + lVar215 * 2) = uVar266;
                                  auVar309 = vfmadd213ps_fma(auVar1263,auVar310,auVar268);
                                  auVar309 = vfmadd231ps_fma(auVar309,auVar945,auVar1095);
                                  uVar266 = vmovlps_avx(auVar309);
                                  auStack_560[lVar215] = uVar266;
                                  auVar309 = vfmadd213ps_fma(auVar960,auVar1014,auVar672);
                                  auVar309 = vfmadd231ps_fma(auVar309,auVar356,auVar1170);
                                  uVar266 = vmovlps_avx(auVar309);
                                  auStack_520[lVar215] = uVar266;
                                  uVar266 = *(undefined8 *)
                                             ((long)puVar214 + (long)(iVar258 * 0xe) * 4);
                                  auVar268 = vfmadd213ps_fma(auVar310,auVar282,auVar268);
                                  auVar435._0_4_ = auVar268._0_4_ + auVar945._0_4_ + (float)uVar266;
                                  auVar435._4_4_ =
                                       auVar268._4_4_ +
                                       auVar945._4_4_ + (float)((ulong)uVar266 >> 0x20);
                                  auVar435._8_4_ = auVar268._8_4_ + auVar945._8_4_ + 0.0;
                                  auVar435._12_4_ = auVar268._12_4_ + auVar945._12_4_ + 0.0;
                                  uVar266 = vmovlps_avx(auVar435);
                                  auStack_4e0[lVar215] = uVar266;
                                  puVar214 = (undefined8 *)
                                             ((long)puVar214 + (long)(iVar258 << 4) * 4);
                                }
                                lVar215 = (long)((((int)local_a20 + (int)local_780) / local_760) * 6
                                                );
                                iVar187 = (((int)local_a20 + (int)local_780) % local_760) * 6;
                                puVar254 = (undefined4 *)
                                           ((long)pvVar204 + (long)iVar187 * 4 + lVar216 * lVar215);
                                pfVar197 = &fStack_624;
                                for (lVar202 = 0; lVar202 != 6; lVar202 = lVar202 + 1) {
                                  if (lVar202 < lVar234 - lVar215) {
                                    fVar864 = pfVar197[-7] + pfVar197[-9];
                                    fVar865 = pfVar197[-6] + pfVar197[-8];
                                    fVar15 = pfVar197[-9] - pfVar197[-7];
                                    fVar866 = pfVar197[-4] + pfVar197[-2];
                                    fVar16 = pfVar197[-5] - pfVar197[-3];
                                    fVar867 = pfVar197[-0xb] + (float)local_a60 + pfVar197[-0xd];
                                    fVar17 = pfVar197[-4] - pfVar197[-2];
                                    auVar309 = ZEXT416((uint)(pfVar197[-3] + pfVar197[-5]));
                                    auVar945 = SUB6416(ZEXT464(0x42000000),0);
                                    auVar310 = vfmadd231ss_fma(ZEXT416((uint)(fVar867 + pfVar197[
                                                  -0xf] + fVar864)),auVar309,auVar945);
                                    fVar868 = (float)local_a80 + pfVar197[-0xc] + pfVar197[-10];
                                    fVar248 = pfVar197[-0xe];
                                    fVar869 = (float)local_a60 + (pfVar197[-0xd] - pfVar197[-0xb]);
                                    fVar5 = (float)local_a80 + (pfVar197[-0xc] - pfVar197[-10]);
                                    auVar268 = vfmadd213ss_fma(auVar945,ZEXT416((uint)fVar15),
                                                               ZEXT416((uint)fVar869));
                                    local_a40._0_4_ = fVar16 + auVar268._0_4_ + pfVar197[-1];
                                    auVar534 = ZEXT416((uint)(pfVar197[-8] - pfVar197[-6]));
                                    auVar268 = vfmadd213ss_fma(auVar945,auVar534,
                                                               ZEXT416((uint)fVar5));
                                    fVar220 = *pfVar197;
                                    *puVar254 = auVar310._0_4_;
                                    auVar310 = vfmadd231ss_fma(ZEXT416((uint)(fVar868 + fVar248 +
                                                                             fVar865)),
                                                               ZEXT416((uint)fVar866),auVar945);
                                    puVar254[iVar189] = auVar310._0_4_;
                                    if (iVar187 + 1 < iVar257) {
                                      auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                                                                 auVar534,ZEXT416((uint)fVar5));
                                      auVar945 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar17),
                                                                 SUB6416(ZEXT464(0x41800000),0));
                                      auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                                                                 ZEXT416((uint)fVar15),
                                                                 ZEXT416((uint)fVar869));
                                      auVar310 = vfmadd231ss_fma(auVar310,SUB6416(ZEXT464(0x41800000
                                                                                         ),0),
                                                                 ZEXT416((uint)fVar16));
                                      puVar254[1] = auVar310._0_4_;
                                      puVar254[(long)iVar189 + 1] = auVar945._0_4_;
                                    }
                                    if (iVar187 + 2 < iVar257) {
                                      auVar310 = vfmadd132ss_fma(SUB6416(ZEXT464(0x40800000),0),
                                                                 ZEXT416((uint)fVar867),
                                                                 ZEXT416((uint)fVar864));
                                      auVar945 = vfmadd231ss_fma(auVar310,auVar309,
                                                                 SUB6416(ZEXT464(0x41000000),0));
                                      auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),
                                                                 ZEXT416((uint)fVar865),
                                                                 ZEXT416((uint)fVar868));
                                      auVar310 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar866),
                                                                 SUB6416(ZEXT464(0x41000000),0));
                                      puVar254[2] = auVar945._0_4_;
                                      puVar254[(long)iVar189 + 2] = auVar310._0_4_;
                                    }
                                    if (iVar187 + 3 < iVar257) {
                                      auVar310 = vfmadd213ss_fma(ZEXT416((uint)fVar15),
                                                                 SUB6416(ZEXT464(0x41000000),0),
                                                                 ZEXT416((uint)fVar869));
                                      auVar310 = vfmadd213ss_fma(ZEXT416((uint)fVar16),
                                                                 SUB6416(ZEXT464(0x40800000),0),
                                                                 auVar310);
                                      auVar945 = vfmadd213ss_fma(auVar534,SUB6416(ZEXT464(0x41000000
                                                                                         ),0),
                                                                 ZEXT416((uint)fVar5));
                                      auVar945 = vfmadd213ss_fma(ZEXT416((uint)fVar17),
                                                                 SUB6416(ZEXT464(0x40800000),0),
                                                                 auVar945);
                                      puVar254[3] = auVar310._0_4_;
                                      puVar254[(long)iVar189 + 3] = auVar945._0_4_;
                                    }
                                    if (iVar187 + 4 < iVar257) {
                                      auVar310 = vfmadd213ss_fma(ZEXT416((uint)fVar864),
                                                                 SUB6416(ZEXT464(0x41800000),0),
                                                                 ZEXT416((uint)fVar867));
                                      auVar310 = vfmadd213ss_fma(auVar309,SUB6416(ZEXT464(0x40000000
                                                                                         ),0),
                                                                 auVar310);
                                      auVar945 = vfmadd213ss_fma(ZEXT416((uint)fVar865),
                                                                 SUB6416(ZEXT464(0x41800000),0),
                                                                 ZEXT416((uint)fVar868));
                                      auVar945 = vfmadd213ss_fma(ZEXT416((uint)fVar866),
                                                                 SUB6416(ZEXT464(0x40000000),0),
                                                                 auVar945);
                                      puVar254[4] = auVar310._0_4_;
                                      puVar254[(long)iVar189 + 4] = auVar945._0_4_;
                                    }
                                    if (iVar187 + 5 < iVar257) {
                                      puVar254[5] = (float)local_a40;
                                      puVar254[(long)iVar189 + 5] =
                                           fVar17 + auVar268._0_4_ + fVar220;
                                    }
                                    puVar254 = puVar254 + iVar257;
                                  }
                                  pfVar197 = pfVar197 + 0x10;
                                }
                                puVar224 = puVar224 + 1;
                              }
                              iVar192 = iVar192 + iVar258 * 0x80;
                            }
                            for (; (long)uVar209 < (long)local_6f0._0_8_; uVar209 = uVar209 + 1) {
                              if (local_8d8 == (void *)0x0) {
                                fVar248 = 0.0;
                              }
                              else {
                                fVar248 = *(float *)((long)local_8d8 +
                                                    (uVar209 + (long)local_9c8) * 4);
                              }
                              iVar187 = top_blob->w;
                              sVar13 = top_blob->cstep;
                              sVar14 = top_blob->elemsize;
                              pvVar204 = top_blob->data;
                              pfVar197 = (float *)((long)local_738.data + (long)iVar192 * 4);
                              for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                                local_b80 = (int)uVar229;
                                pfVar206 = pfVar197;
                                for (lVar216 = -8; auVar268 = SUB6416(ZEXT464(0x41800000),0),
                                    lVar216 != 0; lVar216 = lVar216 + 1) {
                                  fVar220 = pfVar206[lVar256] + pfVar206[iVar258];
                                  fVar866 = pfVar206[iVar258] - pfVar206[lVar256];
                                  fVar864 = pfVar206[lVar208] + pfVar206[iVar258 * 3];
                                  fVar867 = pfVar206[iVar258 * 3] - pfVar206[lVar208];
                                  fVar865 = pfVar206[lVar201] + pfVar206[iVar258 * 5];
                                  fVar868 = pfVar206[iVar258 * 5] - pfVar206[lVar201];
                                  auVar310 = vfmadd231ss_fma(ZEXT416((uint)(fVar864 + fVar220 +
                                                                           *pfVar206)),
                                                             ZEXT416((uint)fVar865),
                                                             SUB6416(ZEXT464(0x42000000),0));
                                  *(int *)((long)&local_640 + lVar216 * 4) = auVar310._0_4_;
                                  auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),
                                                             ZEXT416((uint)fVar867),
                                                             ZEXT416((uint)fVar866));
                                  auVar310 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar868),
                                                             auVar268);
                                  afStack_618[lVar216 + -2] = auVar310._0_4_;
                                  auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),
                                                             ZEXT416((uint)fVar864),
                                                             ZEXT416((uint)fVar220));
                                  auVar310 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar865),
                                                             SUB6416(ZEXT464(0x41000000),0));
                                  local_600[lVar216] = auVar310._0_4_;
                                  auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x41000000),0),
                                                             ZEXT416((uint)fVar867),
                                                             ZEXT416((uint)fVar866));
                                  auVar310 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar868),
                                                             SUB6416(ZEXT464(0x40800000),0));
                                  local_5e0[lVar216] = auVar310._0_4_;
                                  auVar268 = vfmadd213ss_fma(ZEXT416((uint)fVar864),auVar268,
                                                             ZEXT416((uint)fVar220));
                                  auVar268 = vfmadd231ss_fma(auVar268,SUB6416(ZEXT464(0x40000000),0)
                                                             ,ZEXT416((uint)fVar865));
                                  local_5c0[lVar216] = auVar268._0_4_;
                                  auVar268 = vfmadd213ss_fma(ZEXT416((uint)fVar867),
                                                             SUB6416(ZEXT464(0x42000000),0),
                                                             ZEXT416((uint)fVar866));
                                  local_5a0[lVar216] =
                                       auVar268._0_4_ + fVar868 + pfVar206[iVar258 * 7];
                                  pfVar206 = pfVar206 + lVar200;
                                }
                                lVar216 = (long)(((local_b80 + (int)local_780) / local_760) * 6);
                                iVar188 = ((local_b80 + (int)local_780) % local_760) * 6;
                                puVar254 = (undefined4 *)
                                           ((long)pvVar204 +
                                           (long)iVar188 * 4 +
                                           (long)iVar187 * sVar14 * lVar216 +
                                           (uVar209 + (long)local_9c8) * sVar13 * sVar14);
                                pfVar206 = afStack_648 + 1;
                                for (lVar215 = 0; lVar215 != 6; lVar215 = lVar215 + 1) {
                                  if (lVar215 < lVar234 - lVar216) {
                                    fVar864 = pfVar206[-3] + pfVar206[-4];
                                    fVar868 = pfVar206[-4] - pfVar206[-3];
                                    fVar865 = pfVar206[-1] + pfVar206[-2];
                                    fVar869 = pfVar206[-2] - pfVar206[-1];
                                    fVar866 = pfVar206[-6] + fVar248 + pfVar206[-5];
                                    auVar945 = vfmadd231ss_fma(ZEXT416((uint)(fVar866 + pfVar206[-7]
                                                                             + fVar864)),
                                                               ZEXT416((uint)fVar865),
                                                               SUB6416(ZEXT464(0x42000000),0));
                                    fVar867 = (pfVar206[-6] - pfVar206[-5]) + fVar248;
                                    auVar310 = vfmadd231ss_fma(ZEXT416((uint)fVar866),
                                                               ZEXT416((uint)fVar864),auVar268);
                                    auVar309 = vfmadd231ss_fma(auVar310,ZEXT416((uint)fVar865),
                                                               ZEXT416(0x40000000));
                                    auVar310 = vfmadd213ss_fma(SUB6416(ZEXT464(0x42000000),0),
                                                               ZEXT416((uint)fVar868),
                                                               ZEXT416((uint)fVar867));
                                    fVar220 = *pfVar206;
                                    *puVar254 = auVar945._0_4_;
                                    if (iVar188 + 1 < iVar257) {
                                      auVar945 = vfmadd231ss_fma(ZEXT416((uint)fVar867),
                                                                 ZEXT416((uint)fVar868),
                                                                 ZEXT416(0x40000000));
                                      auVar945 = vfmadd231ss_fma(auVar945,ZEXT416((uint)fVar869),
                                                                 auVar268);
                                      puVar254[1] = auVar945._0_4_;
                                    }
                                    if (iVar188 + 2 < iVar257) {
                                      auVar945 = vfmadd132ss_fma(ZEXT416((uint)fVar864),
                                                                 ZEXT416((uint)fVar866),
                                                                 ZEXT416(0x40800000));
                                      auVar945 = vfmadd132ss_fma(ZEXT416((uint)fVar865),auVar945,
                                                                 ZEXT416(0x41000000));
                                      puVar254[2] = auVar945._0_4_;
                                    }
                                    if (iVar188 + 3 < iVar257) {
                                      auVar945 = vfmadd132ss_fma(ZEXT416((uint)fVar868),
                                                                 ZEXT416((uint)fVar867),
                                                                 ZEXT416(0x41000000));
                                      auVar945 = vfmadd231ss_fma(auVar945,ZEXT416((uint)fVar869),
                                                                 ZEXT416(0x40800000));
                                      puVar254[3] = auVar945._0_4_;
                                    }
                                    if (iVar188 + 4 < iVar257) {
                                      puVar254[4] = auVar309._0_4_;
                                    }
                                    if (iVar188 + 5 < iVar257) {
                                      puVar254[5] = auVar310._0_4_ + fVar220 + fVar869;
                                    }
                                    puVar254 = puVar254 + iVar257;
                                  }
                                  pfVar206 = pfVar206 + 8;
                                }
                                pfVar197 = pfVar197 + 1;
                              }
                              iVar192 = iVar192 + iVar190;
                            }
                            iVar187 = (int)local_780 + local_a88;
                          }
                          if (local_738.refcount != (int *)0x0) {
                            LOCK();
                            *local_738.refcount = *local_738.refcount + -1;
                            UNLOCK();
                            if (*local_738.refcount == 0) {
                              if (local_738.allocator == (Allocator *)0x0) {
                                free(local_738.data);
                              }
                              else {
                                (*(local_738.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          iVar187 = local_6bc + 1;
                        }
                      }
                      piVar255 = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
                      if (piVar255 != (int *)0x0) {
                        LOCK();
                        *piVar255 = *piVar255 + -1;
                        UNLOCK();
                        if (*piVar255 == 0) {
                          auVar230 = (undefined1  [8])
                                     CONCAT44(local_810.data._4_4_,(int)local_810.data);
                          if (local_810.allocator == (Allocator *)0x0) {
LAB_001cadc3:
                            free((void *)auVar230);
                          }
                          else {
                            (*(local_810.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                  }
                }
                lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
                lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
                piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
                local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
                local_780 = CONCAT44(local_780._4_4_,(int)local_780);
                if (piVar255 != (int *)0x0) {
                  LOCK();
                  *piVar255 = *piVar255 + -1;
                  UNLOCK();
                  local_a80 = piVar222;
                  local_a40 = lVar200;
                  local_780 = lVar208;
                  if (*piVar255 == 0) {
                    if (local_8b0 == (Allocator *)0x0) goto LAB_001c2642;
                    (*local_8b0->_vptr_Allocator[3])();
                  }
                }
                goto LAB_001c264d;
              }
            }
            else {
              uVar6 = top_blob->w;
              uVar9 = top_blob->h;
              auVar267._4_4_ = uVar9;
              auVar267._0_4_ = uVar6;
              auVar268 = vpcmpeqd_avx((undefined1  [16])sum0,(undefined1  [16])sum0);
              auVar267._8_8_ = 0;
              auVar268 = vpsubd_avx(auVar267,auVar268);
              auVar310 = vpsrld_avx(auVar268,0x1f);
              auVar268 = vpaddd_avx(auVar268,auVar310);
              auVar268 = vpsrad_avx(auVar268,1);
              uVar247 = top_blob->elempack * top_blob->c;
              pvVar251 = (void *)(ulong)uVar247;
              uVar244 = auVar268._4_4_ * auVar268._0_4_;
              pvVar204 = (void *)(ulong)uVar244;
              iVar257 = local_920.elempack * local_920.c;
              get_optimal_tile_mnk
                        (uVar247,uVar244,iVar257,&local_a84,(int *)&local_a88,&local_844,
                         (int)fVar220);
              iVar187 = local_844;
              uVar259 = local_a88;
              local_850 = (void *)((long)(int)(local_a84 + uVar247 + -1) / (long)local_a84 &
                                  0xffffffff);
              iVar188 = (int)(uVar244 + local_a88 + -1) / (int)local_a88;
              iVar239 = (iVar257 + local_844 + -1) / local_844;
              local_890 = 0;
              iVar258 = local_844 * local_a88;
              local_8d0 = (undefined1  [8])0x0;
              fStack_8c8 = 0.0;
              uStack_8c4 = 0;
              local_8c0 = 0;
              uStack_8bf = 0;
              local_8b8 = 0.0;
              local_8b0 = (Allocator *)0x0;
              iStack_8a8 = 0;
              fStack_8a4 = 0.0;
              fStack_8a0 = 0.0;
              iStack_89c = 0;
              iStack_898 = 0;
              Mat::create((Mat *)local_8d0,iVar258,0x10,iVar239,iVar188,4,opt->workspace_allocator);
              piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
              iVar189 = -100;
              local_9c8 = pvVar204;
              local_788 = pvVar251;
              if ((local_8d0 != (undefined1  [8])0x0) && ((long)iStack_898 * local_890 != 0)) {
                fVar248 = (float)(iVar188 * iVar239);
                iVar258 = iVar258 * 0x10;
                if (((int)(float)local_a80 < 2) || ((int)(float)local_a80 <= (int)fVar248)) {
                  local_620 = 0;
                  local_660 = (undefined1  [8])0x0;
                  afStack_658[0] = 0.0;
                  afStack_658[1] = 0.0;
                  uStack_650 = (pointer)0x0;
                  afStack_648[0] = 0.0;
                  local_640 = (Allocator *)0x0;
                  iStack_638 = 0;
                  fStack_634 = 0.0;
                  fStack_630 = 0.0;
                  iStack_62c = 0;
                  iStack_628 = 0;
                  Mat::create((Mat *)local_660,iVar258,1,(int)(float)local_a80,4,
                              opt->workspace_allocator);
                  if ((local_660 != (undefined1  [8])0x0) && ((long)iStack_628 * local_620 != 0)) {
                    fVar220 = 0.0;
                    if ((int)fVar248 < 1) {
                      fVar248 = fVar220;
                    }
                    while (fVar248 != fVar220) {
                      local_a40._4_4_ = 0;
                      local_a60._0_4_ = (float)((int)fVar220 % iVar239);
                      iVar188 = ((int)fVar220 / iVar239) * uVar259;
                      iVar258 = (int)(float)local_a60 * iVar187;
                      uVar244 = (int)local_9c8 - iVar188;
                      if ((int)uVar259 < (int)uVar244) {
                        uVar244 = uVar259;
                      }
                      iVar249 = iVar257 - iVar258;
                      if (iVar187 < iVar249) {
                        iVar249 = iVar187;
                      }
                      local_a40._0_4_ = fVar220;
                      iVar189 = get_omp_thread_num();
                      local_810.data =
                           (void *)((long)iVar189 * local_620 * (long)uStack_650 + (long)local_660);
                      local_810.refcount._0_4_ = 0;
                      local_810.refcount._4_4_ = 0;
                      local_810.elemsize = (size_t)uStack_650;
                      local_810.elempack = (int)afStack_648[0];
                      local_810.allocator = local_640;
                      local_810.w = (int)fStack_634;
                      local_810.h = (int)fStack_630;
                      local_810.d = 1;
                      local_810.c = iStack_62c;
                      local_810.dims = iStack_638 + -1;
                      local_810.cstep =
                           ((long)uStack_650 * (long)(int)fStack_630 * (long)(int)fStack_634 + 0xfU
                           & 0xfffffffffffffff0) / (ulong)uStack_650;
                      if (iStack_638 == 4) {
                        local_810.cstep = (long)(int)fStack_630 * (long)(int)fStack_634;
                      }
                      conv3x3s1_winograd23_transform_input_tile
                                (&local_920,&local_810,iVar188,uVar244,iVar258,iVar249,
                                 in_stack_fffffffffffff440);
                      local_738.elemsize = CONCAT71(uStack_8bf,local_8c0);
                      local_738.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                      local_738.data =
                           (void *)((long)local_8d0 +
                                   (uint)(float)local_a60 * local_738.elemsize * local_738.cstep +
                                   (long)((int)fVar220 / iVar239) * local_890 * local_738.elemsize);
                      local_738.refcount = (int *)0x0;
                      local_738.elempack = (int)local_8b8;
                      local_738.allocator = local_8b0;
                      local_738.dims = 2;
                      local_738.w = (int)fStack_8a4;
                      local_738.h = (int)fStack_8a0;
                      local_738.d = 1;
                      local_738.c = 1;
                      transpose_pack_B_tile
                                (&local_810,&local_738,0x10,uVar244,iVar249,(int)local_738.cstep);
                      fVar220 = (float)((int)(float)local_a40 + 1);
                    }
                    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      if (*piVar255 == 0) {
                        if (local_640 == (Allocator *)0x0) goto LAB_001c68d4;
                        (*local_640->_vptr_Allocator[3])();
                      }
                    }
                    goto LAB_001c68dc;
                  }
                  piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                  piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                  if (piVar255 != (int *)0x0) {
                    LOCK();
                    *piVar255 = *piVar255 + -1;
                    UNLOCK();
                    piVar222 = local_a80;
                    if (*piVar255 == 0) {
                      auVar230 = local_660;
                      if (local_640 == (Allocator *)0x0) goto LAB_001c7812;
                      (*local_640->_vptr_Allocator[3])();
                      piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                    }
                  }
                }
                else {
                  local_620 = 0;
                  local_660 = (undefined1  [8])0x0;
                  afStack_658[0] = 0.0;
                  afStack_658[1] = 0.0;
                  uStack_650 = (pointer)0x0;
                  afStack_648[0] = 0.0;
                  local_640 = (Allocator *)0x0;
                  iStack_638 = 0;
                  fStack_634 = 0.0;
                  fStack_630 = 0.0;
                  iStack_62c = 0;
                  iStack_628 = 0;
                  Mat::create((Mat *)local_660,iVar258,4,opt->workspace_allocator);
                  if ((local_660 == (undefined1  [8])0x0) || ((long)iStack_628 * local_620 == 0)) {
                    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                    piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      piVar222 = local_a80;
                      if (*piVar255 == 0) {
                        auVar230 = local_660;
                        if (local_640 == (Allocator *)0x0) goto LAB_001c7812;
                        (*local_640->_vptr_Allocator[3])();
                        piVar222 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                      }
                    }
                  }
                  else {
                    fVar220 = 0.0;
                    if ((int)fVar248 < 1) {
                      fVar248 = fVar220;
                    }
                    for (; fVar248 != fVar220; fVar220 = (float)((int)fVar220 + 1)) {
                      iVar188 = ((int)fVar220 / iVar239) * uVar259;
                      iVar258 = (int)((long)(int)fVar220 % (long)iVar239) * iVar187;
                      uVar244 = (int)local_9c8 - iVar188;
                      if ((int)uVar259 < (int)uVar244) {
                        uVar244 = uVar259;
                      }
                      iVar249 = iVar257 - iVar258;
                      if (iVar187 < iVar249) {
                        iVar249 = iVar187;
                      }
                      conv3x3s1_winograd23_transform_input_tile
                                (&local_920,(Mat *)local_660,iVar188,uVar244,iVar258,iVar249,
                                 in_stack_fffffffffffff440);
                      local_810.elemsize = CONCAT71(uStack_8bf,local_8c0);
                      local_810.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                      local_810.data =
                           (void *)((long)local_8d0 +
                                   ((long)(int)fVar220 % (long)iVar239 & 0xffffffffU) *
                                   local_810.elemsize * local_810.cstep +
                                   (long)((int)fVar220 / iVar239) * local_890 * local_810.elemsize);
                      local_810.refcount._0_4_ = 0;
                      local_810.refcount._4_4_ = 0;
                      local_810.elempack = (int)local_8b8;
                      local_810.allocator = local_8b0;
                      local_810.dims = 2;
                      local_810.w = (int)fStack_8a4;
                      local_810.h = (int)fStack_8a0;
                      local_810.d = 1;
                      local_810.c = 1;
                      transpose_pack_B_tile
                                ((Mat *)local_660,&local_810,0x10,uVar244,iVar249,
                                 (int)local_810.cstep);
                    }
                    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      if (*piVar255 == 0) {
                        if (local_640 == (Allocator *)0x0) {
LAB_001c68d4:
                          free((void *)local_660);
                        }
                        else {
                          (*local_640->_vptr_Allocator[3])();
                        }
                      }
                    }
LAB_001c68dc:
                    local_810.cstep = 0;
                    local_810.data._0_4_ = 0;
                    local_810.data._4_4_ = 0;
                    local_810.refcount._0_4_ = 0;
                    local_810.refcount._4_4_ = 0;
                    local_810.elemsize = 0;
                    local_810.elempack = 0;
                    local_810.allocator = (Allocator *)0x0;
                    local_810.dims = 0;
                    local_810.w = 0;
                    local_810.h = 0;
                    local_810.d = 0;
                    local_810.c = 0;
                    Mat::create(&local_810,local_a88 * local_a84 * 0x10,1,(int)(float)local_a80,4,
                                opt->workspace_allocator);
                    iVar189 = -100;
                    if ((CONCAT44(local_810.data._4_4_,(int)local_810.data) != 0) &&
                       ((long)local_810.c * local_810.cstep != 0)) {
                      iVar187 = (int)local_850;
                      local_850 = (void *)((ulong)local_850 & 0xffffffff);
                      if (iVar187 < 1) {
                        local_850 = (void *)0x0;
                      }
                      pvVar204 = (void *)0x0;
                      while (iVar187 = local_a84, iVar189 = 0, pvVar204 != local_850) {
                        local_8d8 = pvVar204;
                        iVar188 = get_omp_thread_num();
                        local_738.data =
                             (void *)((long)iVar188 * local_810.cstep * local_810.elemsize +
                                     CONCAT44(local_810.data._4_4_,(int)local_810.data));
                        local_738.refcount = (int *)0x0;
                        local_738.elemsize = local_810.elemsize;
                        local_738.elempack = local_810.elempack;
                        local_738.allocator = local_810.allocator;
                        local_738.w = local_810.w;
                        local_738.h = local_810.h;
                        local_738.c = local_810.d;
                        local_738.d = 1;
                        local_738.dims = local_810.dims + -1;
                        local_738.cstep =
                             (local_810.elemsize * (long)local_810.h * (long)local_810.w + 0xf &
                             0xfffffffffffffff0) / local_810.elemsize;
                        if (local_810.dims == 4) {
                          local_738.cstep = (long)local_810.h * (long)local_810.w;
                        }
                        iVar239 = iVar187 * (int)local_8d8;
                        iVar188 = (int)local_788 - iVar239;
                        if (iVar187 < iVar188) {
                          iVar188 = iVar187;
                        }
                        lVar208 = (long)iVar239;
                        local_928 = (void *)CONCAT44(local_928._4_4_,iVar188);
                        lVar200 = (long)iVar188;
                        uVar210 = 0;
                        while (iVar187 = local_844, uVar244 = local_a88,
                              uVar259 = (int)local_9c8 - (int)uVar210,
                              uVar259 != 0 && (int)uVar210 <= (int)local_9c8) {
                          local_9c0._0_8_ = uVar210;
                          if ((int)local_a88 < (int)uVar259) {
                            uVar259 = local_a88;
                          }
                          iVar258 = 0;
                          iVar188 = iVar257;
                          while( true ) {
                            iVar249 = local_9c0._0_4_;
                            if (iVar257 <= iVar258) break;
                            iVar189 = iVar188;
                            if (iVar187 < iVar188) {
                              iVar189 = iVar187;
                            }
                            fStack_634 = (float)(this->weight_winograd23_data).w;
                            fStack_630 = (float)(this->weight_winograd23_data).h;
                            uStack_650 = (pointer)(this->weight_winograd23_data).elemsize;
                            afStack_648[0] = (float)(this->weight_winograd23_data).elempack;
                            local_640 = (this->weight_winograd23_data).allocator;
                            local_620 = (long)(int)fStack_630 * (long)(int)fStack_634;
                            local_660 = (undefined1  [8])
                                        ((long)(this->weight_winograd23_data).data +
                                        (long)uStack_650 * local_620 * (long)(iVar258 / iVar187) +
                                        (this->weight_winograd23_data).cstep * (long)local_8d8 *
                                        (long)uStack_650);
                            afStack_658[0] = 0.0;
                            afStack_658[1] = 0.0;
                            local_6b8.dims = 2;
                            iStack_62c = 1;
                            iStack_628 = 1;
                            local_6b8.elemsize = CONCAT71(uStack_8bf,local_8c0);
                            local_6b8.cstep = (long)(int)fStack_8a0 * (long)(int)fStack_8a4;
                            local_6b8.data =
                                 (void *)((long)local_8d0 +
                                         local_6b8.cstep * local_6b8.elemsize *
                                         (long)(iVar258 / iVar187) +
                                         (long)(int)((long)((ulong)(uint)(iVar249 >> 0x1f) << 0x20 |
                                                           local_9c0._0_8_ & 0xffffffff) /
                                                    (long)(int)uVar244) * local_890 *
                                         local_6b8.elemsize);
                            local_6b8.refcount = (int *)0x0;
                            local_6b8.elempack = (int)local_8b8;
                            local_6b8.allocator = local_8b0;
                            local_6b8.w = (int)fStack_8a4;
                            local_6b8.h = (int)fStack_8a0;
                            local_6b8.d = 1;
                            local_6b8.c = 1;
                            iVar188 = -(iVar187 - iVar188);
                            iStack_638 = local_6b8.dims;
                            gemm_transB_packed_tile
                                      ((Mat *)local_660,&local_6b8,&local_738,0x10,(int)local_928,
                                       uVar259,iVar258,iVar189);
                            iVar258 = iVar258 + iVar187;
                          }
                          iVar187 = top_blob->w;
                          iVar188 = top_blob->elempack;
                          iVar258 = top_blob->h;
                          iVar207 = (int)top_blob->cstep * iVar188;
                          iVar190 = (iVar187 + 1) / 2;
                          local_880._0_4_ = iVar190;
                          iVar192 = iVar207 * 2;
                          iVar189 = iVar207 * 3;
                          local_a40._0_4_ = (float)(iVar207 * 4);
                          local_a40._4_4_ = (int)(float)local_a40 >> 0x1f;
                          local_a60._0_4_ = (float)(iVar207 * 5);
                          local_a60._4_4_ = (int)(float)local_a60 >> 0x1f;
                          local_a20._0_4_ = iVar207 * 7;
                          local_a20._4_4_ = (int)local_a20 >> 0x1f;
                          uVar210 = 0;
                          if (0 < (int)uVar259) {
                            uVar210 = (ulong)uVar259;
                          }
                          local_a00._0_8_ = uVar210;
                          local_6f0._0_4_ = uVar259 * 0x80;
                          lVar234 = (long)(int)(uVar259 * 0x10) * 4;
                          lVar256 = (long)(int)(uVar259 * 8) * 4;
                          pvVar204 = (this->super_Convolution).bias_data.data;
                          local_7c0._0_8_ = lVar256;
                          local_9a0._0_8_ = lVar234;
                          iVar193 = 0;
                          for (uVar209 = 0; (long)(uVar209 | 7) < lVar200; uVar209 = uVar209 + 8) {
                            if (pvVar204 == (void *)0x0) {
                              auVar376 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                            }
                            else {
                              auVar376 = *(undefined1 (*) [32])
                                          ((long)pvVar204 + uVar209 * 4 + lVar208 * 4);
                            }
                            local_780._4_4_ = 0;
                            lVar201 = (long)iVar193;
                            local_760 = iVar239 + (int)uVar209;
                            lVar216 = 0;
                            for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                              local_960._0_8_ = lVar216;
                              lVar202 = (long)local_738.data + lVar216;
                              for (lVar215 = -0x80; lVar215 != 0; lVar215 = lVar215 + 0x20) {
                                auVar1215 = *(undefined1 (*) [32])(lVar202 + lVar256 + lVar201 * 4);
                                auVar1449 = *(undefined1 (*) [32])(lVar202 + lVar234 + lVar201 * 4);
                                pfVar197 = (float *)(lVar202 + lVar201 * 4);
                                auVar615._0_4_ = auVar1215._0_4_ + *pfVar197 + auVar1449._0_4_;
                                auVar615._4_4_ = auVar1215._4_4_ + pfVar197[1] + auVar1449._4_4_;
                                auVar615._8_4_ = auVar1215._8_4_ + pfVar197[2] + auVar1449._8_4_;
                                auVar615._12_4_ = auVar1215._12_4_ + pfVar197[3] + auVar1449._12_4_;
                                auVar615._16_4_ = auVar1215._16_4_ + pfVar197[4] + auVar1449._16_4_;
                                auVar615._20_4_ = auVar1215._20_4_ + pfVar197[5] + auVar1449._20_4_;
                                auVar615._24_4_ = auVar1215._24_4_ + pfVar197[6] + auVar1449._24_4_;
                                auVar615._28_4_ = auVar1215._28_4_ + pfVar197[7] + auVar1449._28_4_;
                                auVar1215 = vsubps_avx(auVar1215,auVar1449);
                                pfVar197 = (float *)(lVar202 +
                                                    (long)(int)(uVar259 * 0x18) * 4 + lVar201 * 4);
                                auVar394._0_4_ = auVar1215._0_4_ + *pfVar197;
                                auVar394._4_4_ = auVar1215._4_4_ + pfVar197[1];
                                auVar394._8_4_ = auVar1215._8_4_ + pfVar197[2];
                                auVar394._12_4_ = auVar1215._12_4_ + pfVar197[3];
                                auVar394._16_4_ = auVar1215._16_4_ + pfVar197[4];
                                auVar394._20_4_ = auVar1215._20_4_ + pfVar197[5];
                                auVar394._24_4_ = auVar1215._24_4_ + pfVar197[6];
                                auVar394._28_4_ = auVar1215._28_4_ + pfVar197[7];
                                *(undefined1 (*) [32])((long)local_5e0 + lVar215) = auVar615;
                                *(undefined1 (*) [32])((long)auStack_560 + lVar215) = auVar394;
                                lVar202 = lVar202 + (long)(int)(uVar259 * 0x20) * 4;
                              }
                              local_980._0_8_ = uVar229;
                              iVar191 = iVar249 + (int)uVar229;
                              local_840._0_4_ = iVar191 % iVar190;
                              local_840._4_4_ = 0;
                              uVar247 = (iVar191 / iVar190) * 2;
                              pauVar236 = (undefined1 (*) [32])
                                          ((long)top_blob->data +
                                          (long)(int)((uint)local_840 * 2 * iVar188) * 4 +
                                          (long)top_blob->w * top_blob->elemsize *
                                          (long)(int)uVar247 +
                                          (long)(local_760 / iVar188) * top_blob->cstep *
                                          top_blob->elemsize);
                              iVar191 = (uint)local_840 * 2 + 1;
                              pfVar197 = local_600;
                              for (lVar215 = 0; lVar215 != 2; lVar215 = lVar215 + 1) {
                                if ((int)(uVar247 | (uint)lVar215) < iVar258) {
                                  auVar395._0_4_ = auVar376._0_4_ + pfVar197[-0x10];
                                  auVar395._4_4_ = auVar376._4_4_ + pfVar197[-0xf];
                                  auVar395._8_4_ = auVar376._8_4_ + pfVar197[-0xe];
                                  auVar395._12_4_ = auVar376._12_4_ + pfVar197[-0xd];
                                  auVar395._16_4_ = auVar376._16_4_ + pfVar197[-0xc];
                                  auVar395._20_4_ = auVar376._20_4_ + pfVar197[-0xb];
                                  auVar395._24_4_ = auVar376._24_4_ + pfVar197[-10];
                                  auVar395._28_4_ = auVar376._28_4_ + pfVar197[-9];
                                  auVar1215 = *(undefined1 (*) [32])(pfVar197 + -8);
                                  auVar424._0_4_ =
                                       auVar395._0_4_ + pfVar197[-0x18] + auVar1215._0_4_;
                                  auVar424._4_4_ =
                                       auVar395._4_4_ + pfVar197[-0x17] + auVar1215._4_4_;
                                  auVar424._8_4_ =
                                       auVar395._8_4_ + pfVar197[-0x16] + auVar1215._8_4_;
                                  auVar424._12_4_ =
                                       auVar395._12_4_ + pfVar197[-0x15] + auVar1215._12_4_;
                                  auVar503._16_4_ =
                                       auVar395._16_4_ + pfVar197[-0x14] + auVar1215._16_4_;
                                  auVar503._0_16_ = auVar424;
                                  auVar503._20_4_ =
                                       auVar395._20_4_ + pfVar197[-0x13] + auVar1215._20_4_;
                                  auVar503._24_4_ =
                                       auVar395._24_4_ + pfVar197[-0x12] + auVar1215._24_4_;
                                  auVar503._28_4_ =
                                       auVar395._28_4_ + pfVar197[-0x11] + auVar1215._28_4_;
                                  auVar1215 = vsubps_avx(auVar395,auVar1215);
                                  auVar346._0_4_ = auVar1215._0_4_ + *pfVar197;
                                  auVar346._4_4_ = auVar1215._4_4_ + pfVar197[1];
                                  auVar346._8_4_ = auVar1215._8_4_ + pfVar197[2];
                                  auVar346._12_4_ = auVar1215._12_4_ + pfVar197[3];
                                  auVar396._16_4_ = auVar1215._16_4_ + pfVar197[4];
                                  auVar396._0_16_ = auVar346;
                                  auVar396._20_4_ = auVar1215._20_4_ + pfVar197[5];
                                  auVar396._24_4_ = auVar1215._24_4_ + pfVar197[6];
                                  auVar396._28_4_ = auVar1215._28_4_ + pfVar197[7];
                                  auVar310 = auVar503._16_16_;
                                  auVar268 = auVar396._16_16_;
                                  if (iVar188 == 1) {
                                    *(float *)*pauVar236 = auVar424._0_4_;
                                    uVar211 = vextractps_avx(auVar424,1);
                                    *(undefined4 *)(*pauVar236 + (long)iVar207 * 4) = uVar211;
                                    uVar211 = vextractps_avx(auVar424,2);
                                    *(undefined4 *)(*pauVar236 + (long)iVar192 * 4) = uVar211;
                                    uVar211 = vextractps_avx(auVar424,3);
                                    *(undefined4 *)(*pauVar236 + (long)iVar189 * 4) = uVar211;
                                    *(float *)(*pauVar236 + (long)(int)(float)local_a40 * 4) =
                                         auVar503._16_4_;
                                    uVar211 = vextractps_avx(auVar310,1);
                                    *(undefined4 *)(*pauVar236 + (long)(int)(float)local_a60 * 4) =
                                         uVar211;
                                    uVar211 = vextractps_avx(auVar310,2);
                                    *(undefined4 *)(*pauVar236 + (long)(iVar207 * 6) * 4) = uVar211;
                                    uVar211 = vextractps_avx(auVar310,3);
                                    *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4) = uVar211
                                    ;
                                    if (iVar191 < iVar187) {
                                      *(float *)(*pauVar236 + 4) = auVar346._0_4_;
                                      uVar211 = vextractps_avx(auVar346,1);
                                      *(undefined4 *)(*pauVar236 + (long)iVar207 * 4 + 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar346,2);
                                      *(undefined4 *)(*pauVar236 + (long)iVar192 * 4 + 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar346,3);
                                      *(undefined4 *)(*pauVar236 + (long)iVar189 * 4 + 4) = uVar211;
                                      *(float *)(*pauVar236 + (long)(int)(float)local_a40 * 4 + 4) =
                                           auVar396._16_4_;
                                      uVar211 = vextractps_avx(auVar268,1);
                                      *(undefined4 *)
                                       (*pauVar236 + (long)(int)(float)local_a60 * 4 + 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar268,2);
                                      *(undefined4 *)(*pauVar236 + (long)(iVar207 * 6) * 4 + 4) =
                                           uVar211;
                                      uVar211 = vextractps_avx(auVar268,3);
                                      *(undefined4 *)(*pauVar236 + (long)(int)local_a20 * 4 + 4) =
                                           uVar211;
                                    }
                                  }
                                  else if (iVar188 == 4) {
                                    *(undefined1 (*) [16])*pauVar236 = auVar424;
                                    *(undefined1 (*) [16])(*pauVar236 + (long)iVar207 * 4) =
                                         auVar310;
                                    if (iVar191 < iVar187) {
                                      *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar346;
                                      *(undefined1 (*) [16])(*pauVar236 + (long)iVar207 * 4 + 0x10)
                                           = auVar268;
                                    }
                                  }
                                  else if ((iVar188 == 8) &&
                                          (*pauVar236 = auVar503, iVar191 < iVar187)) {
                                    pauVar236[1] = auVar396;
                                  }
                                  pauVar236 = (undefined1 (*) [32])
                                              (*pauVar236 + (long)(iVar188 * iVar187) * 4);
                                }
                                pfVar197 = pfVar197 + 0x20;
                              }
                              lVar216 = lVar216 + 0x20;
                            }
                            local_780._0_4_ = iVar193;
                            iVar193 = iVar193 + uVar259 * 0x80;
                          }
                          lVar216 = (long)(int)(uVar259 * 4);
                          lVar201 = (long)(int)(uVar259 * 0xc) * 4;
                          local_960._0_8_ = lVar201;
                          local_980._0_4_ = uVar259 * 0x40;
                          local_a80 = (int *)(lVar216 * 4);
                          for (; (long)(uVar209 | 3) < lVar200; uVar209 = uVar209 + 4) {
                            if (pvVar204 == (void *)0x0) {
                              auVar268 = (undefined1  [16])0x0;
                            }
                            else {
                              auVar268 = *(undefined1 (*) [16])
                                          ((long)pvVar204 + uVar209 * 4 + lVar208 * 4);
                            }
                            local_780._4_4_ = 0;
                            lVar215 = (long)iVar193;
                            local_a20._0_4_ = iVar239 + (int)uVar209;
                            lVar202 = 0;
                            for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                              local_a40._0_4_ = (float)lVar202;
                              local_a40._4_4_ = (int)((ulong)lVar202 >> 0x20);
                              lVar203 = (long)local_738.data + lVar202;
                              for (lVar217 = -0x40; lVar217 != 0; lVar217 = lVar217 + 0x10) {
                                auVar310 = *(undefined1 (*) [16])
                                            ((long)local_a80 + lVar203 + lVar215 * 4);
                                auVar945 = *(undefined1 (*) [16])(lVar203 + lVar256 + lVar215 * 4);
                                pfVar197 = (float *)(lVar203 + lVar215 * 4);
                                auVar527._0_4_ = auVar310._0_4_ + *pfVar197 + auVar945._0_4_;
                                auVar527._4_4_ = auVar310._4_4_ + pfVar197[1] + auVar945._4_4_;
                                auVar527._8_4_ = auVar310._8_4_ + pfVar197[2] + auVar945._8_4_;
                                auVar527._12_4_ = auVar310._12_4_ + pfVar197[3] + auVar945._12_4_;
                                auVar310 = vsubps_avx(auVar310,auVar945);
                                pfVar197 = (float *)(lVar203 + lVar201 + lVar215 * 4);
                                auVar347._0_4_ = auVar310._0_4_ + *pfVar197;
                                auVar347._4_4_ = auVar310._4_4_ + pfVar197[1];
                                auVar347._8_4_ = auVar310._8_4_ + pfVar197[2];
                                auVar347._12_4_ = auVar310._12_4_ + pfVar197[3];
                                *(undefined1 (*) [16])((long)&local_620 + lVar217) = auVar527;
                                *(undefined1 (*) [16])((long)local_5e0 + lVar217) = auVar347;
                                lVar203 = lVar203 + lVar234;
                              }
                              local_a60._0_4_ = (float)uVar229;
                              local_a60._4_4_ = (int)(uVar229 >> 0x20);
                              iVar191 = (iVar249 + (int)(float)local_a60) % iVar190;
                              uVar247 = ((iVar249 + (int)(float)local_a60) / iVar190) * 2;
                              pauVar226 = (undefined1 (*) [16])
                                          ((long)top_blob->data +
                                          (long)(iVar191 * 2 * iVar188) * 4 +
                                          (long)top_blob->w * top_blob->elemsize *
                                          (long)(int)uVar247 +
                                          (long)((int)local_a20 / iVar188) * top_blob->cstep *
                                          top_blob->elemsize);
                              iVar191 = iVar191 * 2 + 1;
                              pfVar197 = &fStack_630;
                              for (lVar217 = 0; lVar217 != 2; lVar217 = lVar217 + 1) {
                                if ((int)(uVar247 | (uint)lVar217) < iVar258) {
                                  auVar348._0_4_ = auVar268._0_4_ + pfVar197[-8];
                                  auVar348._4_4_ = auVar268._4_4_ + pfVar197[-7];
                                  auVar348._8_4_ = auVar268._8_4_ + pfVar197[-6];
                                  auVar348._12_4_ = auVar268._12_4_ + pfVar197[-5];
                                  auVar310 = *(undefined1 (*) [16])(pfVar197 + -4);
                                  auVar425._0_4_ = auVar348._0_4_ + pfVar197[-0xc] + auVar310._0_4_;
                                  auVar425._4_4_ = auVar348._4_4_ + pfVar197[-0xb] + auVar310._4_4_;
                                  auVar425._8_4_ = auVar348._8_4_ + pfVar197[-10] + auVar310._8_4_;
                                  auVar425._12_4_ = auVar348._12_4_ + pfVar197[-9] + auVar310._12_4_
                                  ;
                                  auVar310 = vsubps_avx(auVar348,auVar310);
                                  auVar349._0_4_ = auVar310._0_4_ + *pfVar197;
                                  auVar349._4_4_ = auVar310._4_4_ + pfVar197[1];
                                  auVar349._8_4_ = auVar310._8_4_ + pfVar197[2];
                                  auVar349._12_4_ = auVar310._12_4_ + pfVar197[3];
                                  if (iVar188 == 1) {
                                    *(float *)*pauVar226 = auVar425._0_4_;
                                    uVar211 = vextractps_avx(auVar425,1);
                                    *(undefined4 *)(*pauVar226 + (long)iVar207 * 4) = uVar211;
                                    uVar211 = vextractps_avx(auVar425,2);
                                    *(undefined4 *)(*pauVar226 + (long)iVar192 * 4) = uVar211;
                                    uVar211 = vextractps_avx(auVar425,3);
                                    *(undefined4 *)(*pauVar226 + (long)iVar189 * 4) = uVar211;
                                    if (iVar191 < iVar187) {
                                      *(float *)(*pauVar226 + 4) = auVar349._0_4_;
                                      uVar211 = vextractps_avx(auVar349,1);
                                      *(undefined4 *)(*pauVar226 + (long)iVar207 * 4 + 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar349,2);
                                      *(undefined4 *)(*pauVar226 + (long)iVar192 * 4 + 4) = uVar211;
                                      uVar211 = vextractps_avx(auVar349,3);
                                      *(undefined4 *)(*pauVar226 + (long)iVar189 * 4 + 4) = uVar211;
                                    }
                                  }
                                  else if ((iVar188 == 4) &&
                                          (*pauVar226 = auVar425, iVar191 < iVar187)) {
                                    pauVar226[1] = auVar349;
                                  }
                                  pauVar226 = (undefined1 (*) [16])
                                              (*pauVar226 + (long)(iVar188 * iVar187) * 4);
                                }
                                pfVar197 = pfVar197 + 0x10;
                              }
                              lVar202 = lVar202 + 0x10;
                            }
                            local_780._0_4_ = iVar193;
                            iVar193 = iVar193 + uVar259 * 0x40;
                          }
                          for (; (long)(uVar209 | 1) < lVar200; uVar209 = uVar209 + 2) {
                            lVar234 = uVar209 + lVar208;
                            if (pvVar204 == (void *)0x0) {
                              fVar248 = 0.0;
                              fVar220 = 0.0;
                            }
                            else {
                              fVar248 = *(float *)((long)pvVar204 + lVar234 * 4);
                              fVar220 = *(float *)((long)pvVar204 + lVar234 * 4 + 4);
                            }
                            local_780._4_4_ = 0;
                            iVar188 = top_blob->w;
                            sVar13 = top_blob->cstep;
                            sVar14 = top_blob->elemsize;
                            pvVar251 = top_blob->data;
                            puVar224 = (undefined8 *)((long)local_738.data + (long)iVar193 * 4);
                            for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                              puVar214 = puVar224;
                              for (lVar256 = -4; lVar256 != 0; lVar256 = lVar256 + 1) {
                                uVar196 = *(ulong *)((long)puVar214 + (long)(int)(uVar259 * 2) * 4);
                                auVar528._8_8_ = 0;
                                auVar528._0_8_ = uVar196;
                                uVar242 = *(ulong *)((long)puVar214 + lVar216 * 4);
                                auVar663._8_8_ = 0;
                                auVar663._0_8_ = uVar242;
                                auVar426._0_4_ = (float)uVar196 + (float)*puVar214 + (float)uVar242;
                                auVar426._4_4_ =
                                     (float)(uVar196 >> 0x20) + (float)((ulong)*puVar214 >> 0x20) +
                                     (float)(uVar242 >> 0x20);
                                auVar426._8_8_ = 0;
                                pAVar8 = (Allocator *)vmovlps_avx(auVar426);
                                (&local_640)[lVar256] = pAVar8;
                                auVar268 = vsubps_avx(auVar528,auVar663);
                                uVar266 = *(undefined8 *)
                                           ((long)puVar214 + (long)(int)(uVar259 * 6) * 4);
                                auVar427._0_4_ = auVar268._0_4_ + (float)uVar266;
                                auVar427._4_4_ = auVar268._4_4_ + (float)((ulong)uVar266 >> 0x20);
                                auVar427._8_4_ = auVar268._8_4_ + 0.0;
                                auVar427._12_4_ = auVar268._12_4_ + 0.0;
                                uVar266 = vmovlps_avx(auVar427);
                                *(undefined8 *)(afStack_618 + (lVar256 + -1) * 2) = uVar266;
                                puVar214 = (undefined8 *)
                                           ((long)puVar214 + (long)(int)(uVar259 * 8) * 4);
                              }
                              iVar192 = iVar249 + (int)uVar229;
                              iVar189 = iVar192 % iVar190;
                              uVar247 = (iVar192 / iVar190) * 2;
                              pfVar197 = (float *)((long)pvVar251 +
                                                  (long)(iVar189 * 2) * 4 +
                                                  (long)(int)uVar247 * (long)iVar188 * sVar14 +
                                                  lVar234 * sVar13 * sVar14);
                              pfVar206 = afStack_648 + 1;
                              for (lVar256 = 0; lVar256 != 2; lVar256 = lVar256 + 1) {
                                if ((int)(uVar247 | (uint)lVar256) < iVar258) {
                                  fVar864 = pfVar206[-3];
                                  fVar865 = pfVar206[-2];
                                  fVar866 = pfVar206[-1];
                                  fVar867 = pfVar206[-5];
                                  fVar868 = *pfVar206;
                                  fVar869 = pfVar206[-4];
                                  fVar5 = pfVar206[-6];
                                  *pfVar197 = fVar248 + fVar867 + pfVar206[-7] + fVar864;
                                  pfVar197[iVar207] = fVar220 + fVar869 + fVar5 + fVar865;
                                  if (iVar189 * 2 + 1 < iVar187) {
                                    pfVar197[1] = ((fVar248 + fVar867) - fVar864) + fVar866;
                                    pfVar197[(long)iVar207 + 1] =
                                         ((fVar220 + fVar869) - fVar865) + fVar868;
                                  }
                                  pfVar197 = pfVar197 + iVar187;
                                }
                                pfVar206 = pfVar206 + 8;
                              }
                              puVar224 = puVar224 + 1;
                            }
                            local_780._0_4_ = iVar193;
                            iVar193 = iVar193 + uVar259 * 0x20;
                          }
                          for (; (long)uVar209 < lVar200; uVar209 = uVar209 + 1) {
                            local_780._4_4_ = 0;
                            if (pvVar204 == (void *)0x0) {
                              fVar248 = 0.0;
                            }
                            else {
                              fVar248 = *(float *)((long)pvVar204 + (uVar209 + lVar208) * 4);
                            }
                            iVar188 = top_blob->w;
                            sVar13 = top_blob->cstep;
                            sVar14 = top_blob->elemsize;
                            pvVar251 = top_blob->data;
                            pfVar197 = (float *)((long)local_738.data + (long)iVar193 * 4);
                            for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                              pfVar206 = pfVar197;
                              for (lVar234 = -4; lVar234 != 0; lVar234 = lVar234 + 1) {
                                fVar220 = pfVar206[(int)uVar259];
                                fVar864 = pfVar206[(int)(uVar259 * 2)];
                                *(float *)((long)&uStack_650 + lVar234 * 4) =
                                     fVar220 + *pfVar206 + fVar864;
                                *(float *)((long)&local_640 + lVar234 * 4) =
                                     (fVar220 - fVar864) + pfVar206[(int)(uVar259 * 3)];
                                pfVar206 = pfVar206 + lVar216;
                              }
                              iVar192 = iVar249 + (int)uVar229;
                              iVar189 = iVar192 % iVar190;
                              uVar247 = (iVar192 / iVar190) * 2;
                              pfVar206 = (float *)((long)pvVar251 +
                                                  (long)(iVar189 * 2) * 4 +
                                                  (long)(int)uVar247 * (long)iVar188 * sVar14 +
                                                  (uVar209 + lVar208) * sVar13 * sVar14);
                              pfVar246 = afStack_658 + 1;
                              for (lVar234 = 0; lVar234 != 2; lVar234 = lVar234 + 1) {
                                if ((int)(uVar247 | (uint)lVar234) < iVar258) {
                                  fVar220 = pfVar246[-1];
                                  fVar864 = pfVar246[-2];
                                  fVar865 = *pfVar246;
                                  *pfVar206 = fVar248 + fVar864 + pfVar246[-3] + fVar220;
                                  if (iVar189 * 2 + 1 < iVar187) {
                                    pfVar206[1] = ((fVar248 + fVar864) - fVar220) + fVar865;
                                  }
                                  pfVar206 = pfVar206 + iVar187;
                                }
                                pfVar246 = pfVar246 + 4;
                              }
                              pfVar197 = pfVar197 + 1;
                            }
                            local_780._0_4_ = iVar193;
                            iVar193 = iVar193 + uVar259 * 0x10;
                          }
                          uVar210 = (ulong)(uVar244 + iVar249);
                        }
                        if (local_738.refcount != (int *)0x0) {
                          LOCK();
                          *local_738.refcount = *local_738.refcount + -1;
                          UNLOCK();
                          if (*local_738.refcount == 0) {
                            if (local_738.allocator == (Allocator *)0x0) {
                              free(local_738.data);
                            }
                            else {
                              (*(local_738.allocator)->_vptr_Allocator[3])();
                            }
                          }
                        }
                        pvVar204 = (void *)((long)local_8d8 + 1);
                      }
                    }
                    piVar255 = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
                    piVar222 = local_a80;
                    if (piVar255 != (int *)0x0) {
                      LOCK();
                      *piVar255 = *piVar255 + -1;
                      UNLOCK();
                      if (*piVar255 == 0) {
                        auVar230 = (undefined1  [8])
                                   CONCAT44(local_810.data._4_4_,(int)local_810.data);
                        if (local_810.allocator == (Allocator *)0x0) {
LAB_001c7812:
                          free((void *)auVar230);
                          piVar222 = local_a80;
                        }
                        else {
                          (*(local_810.allocator)->_vptr_Allocator[3])();
                          piVar222 = local_a80;
                        }
                      }
                    }
                  }
                }
              }
              lVar208 = CONCAT44(local_780._4_4_,(int)local_780);
              lVar200 = CONCAT44(local_a40._4_4_,(float)local_a40);
              piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
              local_a80 = piVar222;
              local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
              local_780 = CONCAT44(local_780._4_4_,(int)local_780);
              if (piVar255 != (int *)0x0) {
                LOCK();
                *piVar255 = *piVar255 + -1;
                UNLOCK();
                local_a40 = lVar200;
                local_780 = lVar208;
                if (*piVar255 == 0) {
                  if (local_8b0 == (Allocator *)0x0) {
LAB_001c2642:
                    local_a80 = piVar222;
                    local_a40 = lVar200;
                    local_780 = lVar208;
                    free((void *)local_8d0);
                  }
                  else {
                    (*local_8b0->_vptr_Allocator[3])();
                    local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
                    local_780 = CONCAT44(local_780._4_4_,(int)local_780);
                  }
                }
              }
LAB_001c264d:
              local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
              piVar255 = local_a80;
              if (iVar189 != 0) goto LAB_001c6881;
            }
            local_a80 = piVar255;
            pLVar233 = this->activation;
            iVar189 = 0;
            local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
            if (pLVar233 != (Layer *)0x0) {
              (*pLVar233->_vptr_Layer[9])(pLVar233,top_blob,opt);
              local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
            }
          }
          else {
            iVar190 = get_cpu_level2_cache_size();
            iVar192 = local_920.w;
            iVar189 = local_920.elempack;
            iVar187 = (this->super_Convolution).num_output;
            auVar945._0_4_ = (this->super_Convolution).kernel_w;
            auVar945._4_4_ = (this->super_Convolution).kernel_h;
            auVar945._8_4_ = (this->super_Convolution).dilation_w;
            auVar945._12_4_ = (this->super_Convolution).dilation_h;
            iVar249 = (this->super_Convolution).stride_w;
            iVar257 = (this->super_Convolution).stride_h;
            local_960._4_4_ = 0;
            local_960._0_4_ = auVar945._0_4_;
            local_980._4_4_ = 0;
            local_980._0_4_ = auVar945._4_4_;
            uVar259 = auVar945._0_4_ * auVar945._4_4_;
            local_a60._4_4_ = 0;
            local_840._4_4_ = 0;
            local_a60._0_4_ = (float)auVar945._8_4_;
            local_840._0_4_ = auVar945._12_4_;
            if ((opt->use_sgemm_convolution != true) ||
               ((int)(uVar259 * auVar945._12_4_ * iVar257 *
                      iVar188 * iVar187 * auVar945._8_4_ * iVar249 * 8) <= iVar190 &&
                (iVar188 < 0x11 && iVar187 < 0x11))) {
              auVar309._8_4_ = 1;
              auVar309._0_8_ = 0x100000001;
              auVar309._12_4_ = 1;
              auVar310 = vpcmpeqd_avx(auVar945,auVar309);
              auVar310 = vpmovsxdq_avx(auVar310);
              auVar268 = vpcmpeqd_avx(auVar268,auVar268);
              if (((auVar268 & ~auVar310) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                  || SUB161(auVar268 & ~auVar310,0xf) < '\0') {
                if ((iVar239 == 8) && (iVar258 == 8)) {
                  if ((iVar257 == 1 && iVar249 == 1) && auVar945 == _DAT_005352c0) {
                    iVar187 = top_blob->w;
                    iVar257 = top_blob->h;
                    if (top_blob->h < 1) {
                      iVar257 = 0;
                    }
                    pvVar204 = (this->super_Convolution).bias_data.data;
                    local_a60._0_4_ = SUB84(pvVar204,0);
                    local_a60._4_4_ = (int)((ulong)pvVar204 >> 0x20);
                    uVar210 = (ulong)(uint)local_920.c;
                    if (local_920.c < 1) {
                      uVar210 = 0;
                    }
                    uVar209 = (ulong)(uint)top_blob->c;
                    if (top_blob->c < 1) {
                      uVar209 = 0;
                    }
                    local_a40._0_4_ = (float)uVar209;
                    local_a40._4_4_ = 0;
                    for (uVar229 = 0; uVar229 != uVar209; uVar229 = uVar229 + 1) {
                      uVar237 = (long)top_blob->h * (long)top_blob->w;
                      uVar196 = top_blob->elemsize;
                      uVar242 = (uVar196 * uVar237 + 0xf & 0xfffffffffffffff0) / uVar196;
                      if (top_blob->dims == 4) {
                        uVar242 = uVar237;
                      }
                      if (pvVar204 == (void *)0x0) {
                        auVar376 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
                      }
                      else {
                        auVar376 = *(undefined1 (*) [32])((long)pvVar204 + uVar229 * 0x20);
                      }
                      pauVar253 = (undefined1 (*) [32])
                                  (top_blob->cstep * uVar229 * uVar196 + (long)top_blob->data);
                      iVar188 = (int)uVar242 * top_blob->d;
                      pauVar236 = pauVar253;
                      if (iVar188 < 1) {
                        iVar188 = 0;
                      }
                      while (bVar186 = iVar188 != 0, iVar188 = iVar188 + -1, bVar186) {
                        *pauVar236 = auVar376;
                        pauVar236 = pauVar236 + 1;
                      }
                      for (uVar196 = 0; uVar196 != uVar210; uVar196 = uVar196 + 1) {
                        piVar222 = (int *)(local_920.cstep * uVar196 * local_920.elemsize +
                                          (long)local_920.data);
                        piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize);
                        lVar200 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                        sVar13 = (this->weight_data_tm).elemsize;
                        pauVar245 = (undefined1 (*) [32])
                                    ((long)(this->weight_data_tm).data +
                                    (long)(this->weight_data_tm).w * uVar196 * sVar13 +
                                    (this->weight_data_tm).cstep * uVar229 * sVar13);
                        pauVar236 = pauVar253;
                        for (iVar188 = 0; iVar188 != iVar257; iVar188 = iVar188 + 1) {
                          lVar208 = 0;
                          for (iVar239 = 0; iVar239 + 1 < iVar187; iVar239 = iVar239 + 2) {
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                            auVar678._4_4_ = uVar211;
                            auVar678._0_4_ = uVar211;
                            auVar678._8_4_ = uVar211;
                            auVar678._12_4_ = uVar211;
                            auVar678._16_4_ = uVar211;
                            auVar678._20_4_ = uVar211;
                            auVar678._24_4_ = uVar211;
                            auVar678._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                            uVar2 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                            auVar963._4_4_ = uVar2;
                            auVar963._0_4_ = uVar2;
                            auVar963._8_4_ = uVar2;
                            auVar963._12_4_ = uVar2;
                            auVar963._16_4_ = uVar2;
                            auVar963._20_4_ = uVar2;
                            auVar963._24_4_ = uVar2;
                            auVar963._28_4_ = uVar2;
                            uVar2 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                            uVar3 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                            auVar1176._4_4_ = uVar3;
                            auVar1176._0_4_ = uVar3;
                            auVar1176._8_4_ = uVar3;
                            auVar1176._12_4_ = uVar3;
                            auVar1176._16_4_ = uVar3;
                            auVar1176._20_4_ = uVar3;
                            auVar1176._24_4_ = uVar3;
                            auVar1176._28_4_ = uVar3;
                            uVar3 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                            auVar541._4_4_ = uVar3;
                            auVar541._0_4_ = uVar3;
                            auVar541._8_4_ = uVar3;
                            auVar541._12_4_ = uVar3;
                            auVar541._16_4_ = uVar3;
                            auVar541._20_4_ = uVar3;
                            auVar541._24_4_ = uVar3;
                            auVar541._28_4_ = uVar3;
                            uVar3 = *(undefined4 *)((long)piVar222 + lVar208 + 0x18);
                            auVar1269._4_4_ = uVar3;
                            auVar1269._0_4_ = uVar3;
                            auVar1269._8_4_ = uVar3;
                            auVar1269._12_4_ = uVar3;
                            auVar1269._16_4_ = uVar3;
                            auVar1269._20_4_ = uVar3;
                            auVar1269._24_4_ = uVar3;
                            auVar1269._28_4_ = uVar3;
                            uVar3 = *(undefined4 *)((long)piVar222 + lVar208 + 0x1c);
                            auVar268 = vfmadd213ps_fma(auVar678,*pauVar245,
                                                       *(undefined1 (*) [32])
                                                        ((long)*pauVar236 + lVar208));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[2],auVar963);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[4],auVar1176);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x20);
                            auVar1497._4_4_ = uVar4;
                            auVar1497._0_4_ = uVar4;
                            auVar1497._8_4_ = uVar4;
                            auVar1497._12_4_ = uVar4;
                            auVar1497._16_4_ = uVar4;
                            auVar1497._20_4_ = uVar4;
                            auVar1497._24_4_ = uVar4;
                            auVar1497._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x28);
                            auVar1475._4_4_ = uVar4;
                            auVar1475._0_4_ = uVar4;
                            auVar1475._8_4_ = uVar4;
                            auVar1475._12_4_ = uVar4;
                            auVar1475._16_4_ = uVar4;
                            auVar1475._20_4_ = uVar4;
                            auVar1475._24_4_ = uVar4;
                            auVar1475._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x30);
                            auVar1418._4_4_ = uVar4;
                            auVar1418._0_4_ = uVar4;
                            auVar1418._8_4_ = uVar4;
                            auVar1418._12_4_ = uVar4;
                            auVar1418._16_4_ = uVar4;
                            auVar1418._20_4_ = uVar4;
                            auVar1418._24_4_ = uVar4;
                            auVar1418._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[6],auVar1269);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x38);
                            auVar1339._4_4_ = uVar4;
                            auVar1339._0_4_ = uVar4;
                            auVar1339._8_4_ = uVar4;
                            auVar1339._12_4_ = uVar4;
                            auVar1339._16_4_ = uVar4;
                            auVar1339._20_4_ = uVar4;
                            auVar1339._24_4_ = uVar4;
                            auVar1339._28_4_ = uVar4;
                            auVar268 = vfmadd213ps_fma(*pauVar245,auVar1497,
                                                       *(undefined1 (*) [32])
                                                        (pauVar236[1] + lVar208));
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1497,pauVar245[8]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1475,pauVar245[10]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1475,pauVar245[2]);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x40);
                            auVar1476._4_4_ = uVar4;
                            auVar1476._0_4_ = uVar4;
                            auVar1476._8_4_ = uVar4;
                            auVar1476._12_4_ = uVar4;
                            auVar1476._16_4_ = uVar4;
                            auVar1476._20_4_ = uVar4;
                            auVar1476._24_4_ = uVar4;
                            auVar1476._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x48);
                            auVar283._4_4_ = uVar4;
                            auVar283._0_4_ = uVar4;
                            auVar283._8_4_ = uVar4;
                            auVar283._12_4_ = uVar4;
                            auVar283._16_4_ = uVar4;
                            auVar283._20_4_ = uVar4;
                            auVar283._24_4_ = uVar4;
                            auVar283._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1418,pauVar245[0xc]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1418,pauVar245[4]);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x50);
                            auVar1419._4_4_ = uVar4;
                            auVar1419._0_4_ = uVar4;
                            auVar1419._8_4_ = uVar4;
                            auVar1419._12_4_ = uVar4;
                            auVar1419._16_4_ = uVar4;
                            auVar1419._20_4_ = uVar4;
                            auVar1419._24_4_ = uVar4;
                            auVar1419._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1339,pauVar245[0xe]);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x58);
                            auVar359._4_4_ = uVar4;
                            auVar359._0_4_ = uVar4;
                            auVar359._8_4_ = uVar4;
                            auVar359._12_4_ = uVar4;
                            auVar359._16_4_ = uVar4;
                            auVar359._20_4_ = uVar4;
                            auVar359._24_4_ = uVar4;
                            auVar359._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1339,pauVar245[6]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1476,pauVar245[8]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1476,pauVar245[0x10])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar283,pauVar245[0x12]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar283,pauVar245[10]);
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208);
                            auVar895._4_4_ = uVar4;
                            auVar895._0_4_ = uVar4;
                            auVar895._8_4_ = uVar4;
                            auVar895._12_4_ = uVar4;
                            auVar895._16_4_ = uVar4;
                            auVar895._20_4_ = uVar4;
                            auVar895._24_4_ = uVar4;
                            auVar895._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                            auVar284._4_4_ = uVar4;
                            auVar284._0_4_ = uVar4;
                            auVar284._8_4_ = uVar4;
                            auVar284._12_4_ = uVar4;
                            auVar284._16_4_ = uVar4;
                            auVar284._20_4_ = uVar4;
                            auVar284._24_4_ = uVar4;
                            auVar284._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1419,pauVar245[0x14])
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1419,pauVar245[0xc]);
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                            auVar1177._4_4_ = uVar4;
                            auVar1177._0_4_ = uVar4;
                            auVar1177._8_4_ = uVar4;
                            auVar1177._12_4_ = uVar4;
                            auVar1177._16_4_ = uVar4;
                            auVar1177._20_4_ = uVar4;
                            auVar1177._24_4_ = uVar4;
                            auVar1177._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar359,pauVar245[0x16]);
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x18);
                            auVar1270._4_4_ = uVar4;
                            auVar1270._0_4_ = uVar4;
                            auVar1270._8_4_ = uVar4;
                            auVar1270._12_4_ = uVar4;
                            auVar1270._16_4_ = uVar4;
                            auVar1270._20_4_ = uVar4;
                            auVar1270._24_4_ = uVar4;
                            auVar1270._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar359,pauVar245[0xe]);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x60);
                            auVar964._4_4_ = uVar4;
                            auVar964._0_4_ = uVar4;
                            auVar964._8_4_ = uVar4;
                            auVar964._12_4_ = uVar4;
                            auVar964._16_4_ = uVar4;
                            auVar964._20_4_ = uVar4;
                            auVar964._24_4_ = uVar4;
                            auVar964._28_4_ = uVar4;
                            auVar268 = vfmadd213ps_fma(auVar964,pauVar245[0x10],ZEXT1632(auVar268));
                            auVar310 = vfmadd213ps_fma(auVar895,pauVar245[0x18],ZEXT1632(auVar310));
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x1a],auVar284);
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x68);
                            auVar285._4_4_ = uVar4;
                            auVar285._0_4_ = uVar4;
                            auVar285._8_4_ = uVar4;
                            auVar285._12_4_ = uVar4;
                            auVar285._16_4_ = uVar4;
                            auVar285._20_4_ = uVar4;
                            auVar285._24_4_ = uVar4;
                            auVar285._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x12],auVar285);
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x20);
                            auVar286._4_4_ = uVar4;
                            auVar286._0_4_ = uVar4;
                            auVar286._8_4_ = uVar4;
                            auVar286._12_4_ = uVar4;
                            auVar286._16_4_ = uVar4;
                            auVar286._20_4_ = uVar4;
                            auVar286._24_4_ = uVar4;
                            auVar286._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x28);
                            auVar1340._4_4_ = uVar4;
                            auVar1340._0_4_ = uVar4;
                            auVar1340._8_4_ = uVar4;
                            auVar1340._12_4_ = uVar4;
                            auVar1340._16_4_ = uVar4;
                            auVar1340._20_4_ = uVar4;
                            auVar1340._24_4_ = uVar4;
                            auVar1340._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x1c],auVar1177)
                            ;
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x70);
                            auVar1178._4_4_ = uVar4;
                            auVar1178._0_4_ = uVar4;
                            auVar1178._8_4_ = uVar4;
                            auVar1178._12_4_ = uVar4;
                            auVar1178._16_4_ = uVar4;
                            auVar1178._20_4_ = uVar4;
                            auVar1178._24_4_ = uVar4;
                            auVar1178._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x14],auVar1178)
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x30);
                            auVar1101._4_4_ = uVar4;
                            auVar1101._0_4_ = uVar4;
                            auVar1101._8_4_ = uVar4;
                            auVar1101._12_4_ = uVar4;
                            auVar1101._16_4_ = uVar4;
                            auVar1101._20_4_ = uVar4;
                            auVar1101._24_4_ = uVar4;
                            auVar1101._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar222 + lVar208 + 0x78);
                            auVar1179._4_4_ = uVar4;
                            auVar1179._0_4_ = uVar4;
                            auVar1179._8_4_ = uVar4;
                            auVar1179._12_4_ = uVar4;
                            auVar1179._16_4_ = uVar4;
                            auVar1179._20_4_ = uVar4;
                            auVar1179._24_4_ = uVar4;
                            auVar1179._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x1e],auVar1270)
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x16],auVar1179)
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x38);
                            auVar1023._4_4_ = uVar4;
                            auVar1023._0_4_ = uVar4;
                            auVar1023._8_4_ = uVar4;
                            auVar1023._12_4_ = uVar4;
                            auVar1023._16_4_ = uVar4;
                            auVar1023._20_4_ = uVar4;
                            auVar1023._24_4_ = uVar4;
                            auVar1023._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar286,pauVar245[0x18]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar286,pauVar245[0x20]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1340,pauVar245[0x1a])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1340,pauVar245[0x22])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1101,pauVar245[0x24])
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x40);
                            auVar1271._4_4_ = uVar4;
                            auVar1271._0_4_ = uVar4;
                            auVar1271._8_4_ = uVar4;
                            auVar1271._12_4_ = uVar4;
                            auVar1271._16_4_ = uVar4;
                            auVar1271._20_4_ = uVar4;
                            auVar1271._24_4_ = uVar4;
                            auVar1271._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1101,pauVar245[0x1c])
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x48);
                            auVar1341._4_4_ = uVar4;
                            auVar1341._0_4_ = uVar4;
                            auVar1341._8_4_ = uVar4;
                            auVar1341._12_4_ = uVar4;
                            auVar1341._16_4_ = uVar4;
                            auVar1341._20_4_ = uVar4;
                            auVar1341._24_4_ = uVar4;
                            auVar1341._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x50);
                            auVar1420._4_4_ = uVar4;
                            auVar1420._0_4_ = uVar4;
                            auVar1420._8_4_ = uVar4;
                            auVar1420._12_4_ = uVar4;
                            auVar1420._16_4_ = uVar4;
                            auVar1420._20_4_ = uVar4;
                            auVar1420._24_4_ = uVar4;
                            auVar1420._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1023,pauVar245[0x26])
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1023,pauVar245[0x1e])
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x58);
                            auVar1477._4_4_ = uVar4;
                            auVar1477._0_4_ = uVar4;
                            auVar1477._8_4_ = uVar4;
                            auVar1477._12_4_ = uVar4;
                            auVar1477._16_4_ = uVar4;
                            auVar1477._20_4_ = uVar4;
                            auVar1477._24_4_ = uVar4;
                            auVar1477._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1271,pauVar245[0x20])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1271,pauVar245[0x28])
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1341,pauVar245[0x22])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1341,pauVar245[0x2a])
                            ;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1420,pauVar245[0x2c])
                            ;
                            uVar4 = *(undefined4 *)(lVar200 + lVar208);
                            auVar679._4_4_ = uVar4;
                            auVar679._0_4_ = uVar4;
                            auVar679._8_4_ = uVar4;
                            auVar679._12_4_ = uVar4;
                            auVar679._16_4_ = uVar4;
                            auVar679._20_4_ = uVar4;
                            auVar679._24_4_ = uVar4;
                            auVar679._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1420,pauVar245[0x24])
                            ;
                            uVar4 = *(undefined4 *)(lVar200 + 8 + lVar208);
                            auVar287._4_4_ = uVar4;
                            auVar287._0_4_ = uVar4;
                            auVar287._8_4_ = uVar4;
                            auVar287._12_4_ = uVar4;
                            auVar287._16_4_ = uVar4;
                            auVar287._20_4_ = uVar4;
                            auVar287._24_4_ = uVar4;
                            auVar287._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                            auVar360._4_4_ = uVar4;
                            auVar360._0_4_ = uVar4;
                            auVar360._8_4_ = uVar4;
                            auVar360._12_4_ = uVar4;
                            auVar360._16_4_ = uVar4;
                            auVar360._20_4_ = uVar4;
                            auVar360._24_4_ = uVar4;
                            auVar360._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1477,pauVar245[0x26])
                            ;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x60);
                            auVar1024._4_4_ = uVar4;
                            auVar1024._0_4_ = uVar4;
                            auVar1024._8_4_ = uVar4;
                            auVar1024._12_4_ = uVar4;
                            auVar1024._16_4_ = uVar4;
                            auVar1024._20_4_ = uVar4;
                            auVar1024._24_4_ = uVar4;
                            auVar1024._28_4_ = uVar4;
                            auVar268 = vfmadd213ps_fma(auVar1024,pauVar245[0x28],ZEXT1632(auVar268))
                            ;
                            uVar4 = *(undefined4 *)(lVar200 + 0x18 + lVar208);
                            auVar439._4_4_ = uVar4;
                            auVar439._0_4_ = uVar4;
                            auVar439._8_4_ = uVar4;
                            auVar439._12_4_ = uVar4;
                            auVar439._16_4_ = uVar4;
                            auVar439._20_4_ = uVar4;
                            auVar439._24_4_ = uVar4;
                            auVar439._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x68);
                            auVar965._4_4_ = uVar4;
                            auVar965._0_4_ = uVar4;
                            auVar965._8_4_ = uVar4;
                            auVar965._12_4_ = uVar4;
                            auVar965._16_4_ = uVar4;
                            auVar965._20_4_ = uVar4;
                            auVar965._24_4_ = uVar4;
                            auVar965._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1477,pauVar245[0x2e])
                            ;
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2a],auVar965);
                            auVar268 = vfmadd213ps_fma(auVar679,pauVar245[0x30],ZEXT1632(auVar310));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x32],auVar287);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x34],auVar360);
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x70);
                            auVar361._4_4_ = uVar4;
                            auVar361._0_4_ = uVar4;
                            auVar361._8_4_ = uVar4;
                            auVar361._12_4_ = uVar4;
                            auVar361._16_4_ = uVar4;
                            auVar361._20_4_ = uVar4;
                            auVar361._24_4_ = uVar4;
                            auVar361._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),pauVar245[0x2c],auVar361);
                            uVar4 = *(undefined4 *)(lVar200 + 0x20 + lVar208);
                            auVar362._4_4_ = uVar4;
                            auVar362._0_4_ = uVar4;
                            auVar362._8_4_ = uVar4;
                            auVar362._12_4_ = uVar4;
                            auVar362._16_4_ = uVar4;
                            auVar362._20_4_ = uVar4;
                            auVar362._24_4_ = uVar4;
                            auVar362._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)((long)piVar255 + lVar208 + 0x78);
                            auVar1102._4_4_ = uVar4;
                            auVar1102._0_4_ = uVar4;
                            auVar1102._8_4_ = uVar4;
                            auVar1102._12_4_ = uVar4;
                            auVar1102._16_4_ = uVar4;
                            auVar1102._20_4_ = uVar4;
                            auVar1102._24_4_ = uVar4;
                            auVar1102._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x36],auVar439);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x2e],auVar1102)
                            ;
                            uVar4 = *(undefined4 *)(lVar200 + 0x28 + lVar208);
                            auVar440._4_4_ = uVar4;
                            auVar440._0_4_ = uVar4;
                            auVar440._8_4_ = uVar4;
                            auVar440._12_4_ = uVar4;
                            auVar440._16_4_ = uVar4;
                            auVar440._20_4_ = uVar4;
                            auVar440._24_4_ = uVar4;
                            auVar440._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)(lVar200 + 0x30 + lVar208);
                            auVar808._4_4_ = uVar4;
                            auVar808._0_4_ = uVar4;
                            auVar808._8_4_ = uVar4;
                            auVar808._12_4_ = uVar4;
                            auVar808._16_4_ = uVar4;
                            auVar808._20_4_ = uVar4;
                            auVar808._24_4_ = uVar4;
                            auVar808._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar362,pauVar245[0x30]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar362,pauVar245[0x38]);
                            uVar4 = *(undefined4 *)(lVar200 + 0x38 + lVar208);
                            auVar363._4_4_ = uVar4;
                            auVar363._0_4_ = uVar4;
                            auVar363._8_4_ = uVar4;
                            auVar363._12_4_ = uVar4;
                            auVar363._16_4_ = uVar4;
                            auVar363._20_4_ = uVar4;
                            auVar363._24_4_ = uVar4;
                            auVar363._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar440,pauVar245[0x32]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar440,pauVar245[0x3a]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar808,pauVar245[0x34]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar808,pauVar245[0x3c]);
                            uVar4 = *(undefined4 *)(lVar200 + 0x40 + lVar208);
                            auVar809._4_4_ = uVar4;
                            auVar809._0_4_ = uVar4;
                            auVar809._8_4_ = uVar4;
                            auVar809._12_4_ = uVar4;
                            auVar809._16_4_ = uVar4;
                            auVar809._20_4_ = uVar4;
                            auVar809._24_4_ = uVar4;
                            auVar809._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar363,pauVar245[0x3e]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar363,pauVar245[0x36]);
                            uVar4 = *(undefined4 *)(lVar200 + 0x48 + lVar208);
                            auVar288._4_4_ = uVar4;
                            auVar288._0_4_ = uVar4;
                            auVar288._8_4_ = uVar4;
                            auVar288._12_4_ = uVar4;
                            auVar288._16_4_ = uVar4;
                            auVar288._20_4_ = uVar4;
                            auVar288._24_4_ = uVar4;
                            auVar288._28_4_ = uVar4;
                            uVar4 = *(undefined4 *)(lVar200 + 0x50 + lVar208);
                            auVar364._4_4_ = uVar4;
                            auVar364._0_4_ = uVar4;
                            auVar364._8_4_ = uVar4;
                            auVar364._12_4_ = uVar4;
                            auVar364._16_4_ = uVar4;
                            auVar364._20_4_ = uVar4;
                            auVar364._24_4_ = uVar4;
                            auVar364._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar809,pauVar245[0x38]);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar809,pauVar245[0x40]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar288,pauVar245[0x3a]);
                            uVar4 = *(undefined4 *)(lVar200 + 0x58 + lVar208);
                            auVar1103._4_4_ = uVar4;
                            auVar1103._0_4_ = uVar4;
                            auVar1103._8_4_ = uVar4;
                            auVar1103._12_4_ = uVar4;
                            auVar1103._16_4_ = uVar4;
                            auVar1103._20_4_ = uVar4;
                            auVar1103._24_4_ = uVar4;
                            auVar1103._28_4_ = uVar4;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar364,pauVar245[0x3c]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1103,pauVar245[0x3e])
                            ;
                            uVar4 = *(undefined4 *)(lVar200 + 0x60 + lVar208);
                            auVar810._4_4_ = uVar4;
                            auVar810._0_4_ = uVar4;
                            auVar810._8_4_ = uVar4;
                            auVar810._12_4_ = uVar4;
                            auVar810._16_4_ = uVar4;
                            auVar810._20_4_ = uVar4;
                            auVar810._24_4_ = uVar4;
                            auVar810._28_4_ = uVar4;
                            auVar268 = vfmadd213ps_fma(auVar810,pauVar245[0x40],ZEXT1632(auVar268));
                            uVar4 = *(undefined4 *)(lVar200 + 0x68 + lVar208);
                            auVar896._4_4_ = uVar4;
                            auVar896._0_4_ = uVar4;
                            auVar896._8_4_ = uVar4;
                            auVar896._12_4_ = uVar4;
                            auVar896._16_4_ = uVar4;
                            auVar896._20_4_ = uVar4;
                            auVar896._24_4_ = uVar4;
                            auVar896._28_4_ = uVar4;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar288,pauVar245[0x42]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x42],auVar896);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar364,pauVar245[0x44]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1103,pauVar245[0x46])
                            ;
                            auVar85._4_4_ = uVar211;
                            auVar85._0_4_ = uVar211;
                            auVar85._8_4_ = uVar211;
                            auVar85._12_4_ = uVar211;
                            auVar85._16_4_ = uVar211;
                            auVar85._20_4_ = uVar211;
                            auVar85._24_4_ = uVar211;
                            auVar85._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[1],auVar85);
                            auVar123._4_4_ = uVar2;
                            auVar123._0_4_ = uVar2;
                            auVar123._8_4_ = uVar2;
                            auVar123._12_4_ = uVar2;
                            auVar123._16_4_ = uVar2;
                            auVar123._20_4_ = uVar2;
                            auVar123._24_4_ = uVar2;
                            auVar123._28_4_ = uVar2;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[3],auVar123);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[5],auVar541);
                            uVar211 = *(undefined4 *)(lVar200 + 0x70 + lVar208);
                            auVar542._4_4_ = uVar211;
                            auVar542._0_4_ = uVar211;
                            auVar542._8_4_ = uVar211;
                            auVar542._12_4_ = uVar211;
                            auVar542._16_4_ = uVar211;
                            auVar542._20_4_ = uVar211;
                            auVar542._24_4_ = uVar211;
                            auVar542._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x44],auVar542);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x24);
                            auVar441._4_4_ = uVar211;
                            auVar441._0_4_ = uVar211;
                            auVar441._8_4_ = uVar211;
                            auVar441._12_4_ = uVar211;
                            auVar441._16_4_ = uVar211;
                            auVar441._20_4_ = uVar211;
                            auVar441._24_4_ = uVar211;
                            auVar441._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x2c);
                            auVar543._4_4_ = uVar211;
                            auVar543._0_4_ = uVar211;
                            auVar543._8_4_ = uVar211;
                            auVar543._12_4_ = uVar211;
                            auVar543._16_4_ = uVar211;
                            auVar543._20_4_ = uVar211;
                            auVar543._24_4_ = uVar211;
                            auVar543._28_4_ = uVar211;
                            auVar44._4_4_ = uVar3;
                            auVar44._0_4_ = uVar3;
                            auVar44._8_4_ = uVar3;
                            auVar44._12_4_ = uVar3;
                            auVar44._16_4_ = uVar3;
                            auVar44._20_4_ = uVar3;
                            auVar44._24_4_ = uVar3;
                            auVar44._28_4_ = uVar3;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[7],auVar44);
                            uVar211 = *(undefined4 *)(lVar200 + 0x78 + lVar208);
                            auVar1104._4_4_ = uVar211;
                            auVar1104._0_4_ = uVar211;
                            auVar1104._8_4_ = uVar211;
                            auVar1104._12_4_ = uVar211;
                            auVar1104._16_4_ = uVar211;
                            auVar1104._20_4_ = uVar211;
                            auVar1104._24_4_ = uVar211;
                            auVar1104._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x46],auVar1104)
                            ;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x34);
                            auVar365._4_4_ = uVar211;
                            auVar365._0_4_ = uVar211;
                            auVar365._8_4_ = uVar211;
                            auVar365._12_4_ = uVar211;
                            auVar365._16_4_ = uVar211;
                            auVar365._20_4_ = uVar211;
                            auVar365._24_4_ = uVar211;
                            auVar365._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x3c);
                            auVar1105._4_4_ = uVar211;
                            auVar1105._0_4_ = uVar211;
                            auVar1105._8_4_ = uVar211;
                            auVar1105._12_4_ = uVar211;
                            auVar1105._16_4_ = uVar211;
                            auVar1105._20_4_ = uVar211;
                            auVar1105._24_4_ = uVar211;
                            auVar1105._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar441,pauVar245[1]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar543,pauVar245[3]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar365,pauVar245[5]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1105,pauVar245[7]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[9],auVar441);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0xb],auVar543);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0xd],auVar365);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0xf],auVar1105);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x44);
                            auVar366._4_4_ = uVar211;
                            auVar366._0_4_ = uVar211;
                            auVar366._8_4_ = uVar211;
                            auVar366._12_4_ = uVar211;
                            auVar366._16_4_ = uVar211;
                            auVar366._20_4_ = uVar211;
                            auVar366._24_4_ = uVar211;
                            auVar366._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x4c);
                            auVar442._4_4_ = uVar211;
                            auVar442._0_4_ = uVar211;
                            auVar442._8_4_ = uVar211;
                            auVar442._12_4_ = uVar211;
                            auVar442._16_4_ = uVar211;
                            auVar442._20_4_ = uVar211;
                            auVar442._24_4_ = uVar211;
                            auVar442._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x54);
                            auVar544._4_4_ = uVar211;
                            auVar544._0_4_ = uVar211;
                            auVar544._8_4_ = uVar211;
                            auVar544._12_4_ = uVar211;
                            auVar544._16_4_ = uVar211;
                            auVar544._20_4_ = uVar211;
                            auVar544._24_4_ = uVar211;
                            auVar544._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x5c);
                            auVar1106._4_4_ = uVar211;
                            auVar1106._0_4_ = uVar211;
                            auVar1106._8_4_ = uVar211;
                            auVar1106._12_4_ = uVar211;
                            auVar1106._16_4_ = uVar211;
                            auVar1106._20_4_ = uVar211;
                            auVar1106._24_4_ = uVar211;
                            auVar1106._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar366,pauVar245[9]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar442,pauVar245[0xb]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar544,pauVar245[0xd]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1106,pauVar245[0xf]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x11],auVar366);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x13],auVar442);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x15],auVar544);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x17],auVar1106)
                            ;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 100);
                            auVar367._4_4_ = uVar211;
                            auVar367._0_4_ = uVar211;
                            auVar367._8_4_ = uVar211;
                            auVar367._12_4_ = uVar211;
                            auVar367._16_4_ = uVar211;
                            auVar367._20_4_ = uVar211;
                            auVar367._24_4_ = uVar211;
                            auVar367._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x6c);
                            auVar443._4_4_ = uVar211;
                            auVar443._0_4_ = uVar211;
                            auVar443._8_4_ = uVar211;
                            auVar443._12_4_ = uVar211;
                            auVar443._16_4_ = uVar211;
                            auVar443._20_4_ = uVar211;
                            auVar443._24_4_ = uVar211;
                            auVar443._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x74);
                            auVar545._4_4_ = uVar211;
                            auVar545._0_4_ = uVar211;
                            auVar545._8_4_ = uVar211;
                            auVar545._12_4_ = uVar211;
                            auVar545._16_4_ = uVar211;
                            auVar545._20_4_ = uVar211;
                            auVar545._24_4_ = uVar211;
                            auVar545._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x7c);
                            auVar1107._4_4_ = uVar211;
                            auVar1107._0_4_ = uVar211;
                            auVar1107._8_4_ = uVar211;
                            auVar1107._12_4_ = uVar211;
                            auVar1107._16_4_ = uVar211;
                            auVar1107._20_4_ = uVar211;
                            auVar1107._24_4_ = uVar211;
                            auVar1107._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar367,pauVar245[0x11],ZEXT1632(auVar268));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x13],auVar443);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x15],auVar545);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x17],auVar1107)
                            ;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                            auVar444._4_4_ = uVar211;
                            auVar444._0_4_ = uVar211;
                            auVar444._8_4_ = uVar211;
                            auVar444._12_4_ = uVar211;
                            auVar444._16_4_ = uVar211;
                            auVar444._20_4_ = uVar211;
                            auVar444._24_4_ = uVar211;
                            auVar444._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                            auVar289._4_4_ = uVar211;
                            auVar289._0_4_ = uVar211;
                            auVar289._8_4_ = uVar211;
                            auVar289._12_4_ = uVar211;
                            auVar289._16_4_ = uVar211;
                            auVar289._20_4_ = uVar211;
                            auVar289._24_4_ = uVar211;
                            auVar289._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                            auVar546._4_4_ = uVar211;
                            auVar546._0_4_ = uVar211;
                            auVar546._8_4_ = uVar211;
                            auVar546._12_4_ = uVar211;
                            auVar546._16_4_ = uVar211;
                            auVar546._20_4_ = uVar211;
                            auVar546._24_4_ = uVar211;
                            auVar546._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x1c);
                            auVar811._4_4_ = uVar211;
                            auVar811._0_4_ = uVar211;
                            auVar811._8_4_ = uVar211;
                            auVar811._12_4_ = uVar211;
                            auVar811._16_4_ = uVar211;
                            auVar811._20_4_ = uVar211;
                            auVar811._24_4_ = uVar211;
                            auVar811._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar444,pauVar245[0x19],ZEXT1632(auVar310));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x1b],auVar289);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x1d],auVar546);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x1f],auVar811);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x24);
                            auVar290._4_4_ = uVar211;
                            auVar290._0_4_ = uVar211;
                            auVar290._8_4_ = uVar211;
                            auVar290._12_4_ = uVar211;
                            auVar290._16_4_ = uVar211;
                            auVar290._20_4_ = uVar211;
                            auVar290._24_4_ = uVar211;
                            auVar290._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x2c);
                            auVar547._4_4_ = uVar211;
                            auVar547._0_4_ = uVar211;
                            auVar547._8_4_ = uVar211;
                            auVar547._12_4_ = uVar211;
                            auVar547._16_4_ = uVar211;
                            auVar547._20_4_ = uVar211;
                            auVar547._24_4_ = uVar211;
                            auVar547._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x34);
                            auVar680._4_4_ = uVar211;
                            auVar680._0_4_ = uVar211;
                            auVar680._8_4_ = uVar211;
                            auVar680._12_4_ = uVar211;
                            auVar680._16_4_ = uVar211;
                            auVar680._20_4_ = uVar211;
                            auVar680._24_4_ = uVar211;
                            auVar680._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x3c);
                            auVar812._4_4_ = uVar211;
                            auVar812._0_4_ = uVar211;
                            auVar812._8_4_ = uVar211;
                            auVar812._12_4_ = uVar211;
                            auVar812._16_4_ = uVar211;
                            auVar812._20_4_ = uVar211;
                            auVar812._24_4_ = uVar211;
                            auVar812._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar290,pauVar245[0x19]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar547,pauVar245[0x1b]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar680,pauVar245[0x1d]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar812,pauVar245[0x1f]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x21],auVar290);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x23],auVar547);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x25],auVar680);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x27],auVar812);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x44);
                            auVar291._4_4_ = uVar211;
                            auVar291._0_4_ = uVar211;
                            auVar291._8_4_ = uVar211;
                            auVar291._12_4_ = uVar211;
                            auVar291._16_4_ = uVar211;
                            auVar291._20_4_ = uVar211;
                            auVar291._24_4_ = uVar211;
                            auVar291._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x4c);
                            auVar548._4_4_ = uVar211;
                            auVar548._0_4_ = uVar211;
                            auVar548._8_4_ = uVar211;
                            auVar548._12_4_ = uVar211;
                            auVar548._16_4_ = uVar211;
                            auVar548._20_4_ = uVar211;
                            auVar548._24_4_ = uVar211;
                            auVar548._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x54);
                            auVar681._4_4_ = uVar211;
                            auVar681._0_4_ = uVar211;
                            auVar681._8_4_ = uVar211;
                            auVar681._12_4_ = uVar211;
                            auVar681._16_4_ = uVar211;
                            auVar681._20_4_ = uVar211;
                            auVar681._24_4_ = uVar211;
                            auVar681._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x5c);
                            auVar813._4_4_ = uVar211;
                            auVar813._0_4_ = uVar211;
                            auVar813._8_4_ = uVar211;
                            auVar813._12_4_ = uVar211;
                            auVar813._16_4_ = uVar211;
                            auVar813._20_4_ = uVar211;
                            auVar813._24_4_ = uVar211;
                            auVar813._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar291,pauVar245[0x21]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar548,pauVar245[0x23]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar681,pauVar245[0x25]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar813,pauVar245[0x27]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x29],auVar291);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2b],auVar548);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 100);
                            auVar292._4_4_ = uVar211;
                            auVar292._0_4_ = uVar211;
                            auVar292._8_4_ = uVar211;
                            auVar292._12_4_ = uVar211;
                            auVar292._16_4_ = uVar211;
                            auVar292._20_4_ = uVar211;
                            auVar292._24_4_ = uVar211;
                            auVar292._28_4_ = uVar211;
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2d],auVar681);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x6c);
                            auVar549._4_4_ = uVar211;
                            auVar549._0_4_ = uVar211;
                            auVar549._8_4_ = uVar211;
                            auVar549._12_4_ = uVar211;
                            auVar549._16_4_ = uVar211;
                            auVar549._20_4_ = uVar211;
                            auVar549._24_4_ = uVar211;
                            auVar549._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar292,pauVar245[0x29],ZEXT1632(auVar310));
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x74);
                            auVar368._4_4_ = uVar211;
                            auVar368._0_4_ = uVar211;
                            auVar368._8_4_ = uVar211;
                            auVar368._12_4_ = uVar211;
                            auVar368._16_4_ = uVar211;
                            auVar368._20_4_ = uVar211;
                            auVar368._24_4_ = uVar211;
                            auVar368._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x7c);
                            auVar682._4_4_ = uVar211;
                            auVar682._0_4_ = uVar211;
                            auVar682._8_4_ = uVar211;
                            auVar682._12_4_ = uVar211;
                            auVar682._16_4_ = uVar211;
                            auVar682._20_4_ = uVar211;
                            auVar682._24_4_ = uVar211;
                            auVar682._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),pauVar245[0x2f],auVar813);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2b],auVar549);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2d],auVar368);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x2f],auVar682);
                            uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                            auVar369._4_4_ = uVar211;
                            auVar369._0_4_ = uVar211;
                            auVar369._8_4_ = uVar211;
                            auVar369._12_4_ = uVar211;
                            auVar369._16_4_ = uVar211;
                            auVar369._20_4_ = uVar211;
                            auVar369._24_4_ = uVar211;
                            auVar369._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                            auVar550._4_4_ = uVar211;
                            auVar550._0_4_ = uVar211;
                            auVar550._8_4_ = uVar211;
                            auVar550._12_4_ = uVar211;
                            auVar550._16_4_ = uVar211;
                            auVar550._20_4_ = uVar211;
                            auVar550._24_4_ = uVar211;
                            auVar550._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                            auVar683._4_4_ = uVar211;
                            auVar683._0_4_ = uVar211;
                            auVar683._8_4_ = uVar211;
                            auVar683._12_4_ = uVar211;
                            auVar683._16_4_ = uVar211;
                            auVar683._20_4_ = uVar211;
                            auVar683._24_4_ = uVar211;
                            auVar683._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x1c + lVar208);
                            auVar814._4_4_ = uVar211;
                            auVar814._0_4_ = uVar211;
                            auVar814._8_4_ = uVar211;
                            auVar814._12_4_ = uVar211;
                            auVar814._16_4_ = uVar211;
                            auVar814._20_4_ = uVar211;
                            auVar814._24_4_ = uVar211;
                            auVar814._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar369,pauVar245[0x31],ZEXT1632(auVar310));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x33],auVar550);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x35],auVar683);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x37],auVar814);
                            uVar211 = *(undefined4 *)(lVar200 + 0x24 + lVar208);
                            auVar684._4_4_ = uVar211;
                            auVar684._0_4_ = uVar211;
                            auVar684._8_4_ = uVar211;
                            auVar684._12_4_ = uVar211;
                            auVar684._16_4_ = uVar211;
                            auVar684._20_4_ = uVar211;
                            auVar684._24_4_ = uVar211;
                            auVar684._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x2c + lVar208);
                            auVar815._4_4_ = uVar211;
                            auVar815._0_4_ = uVar211;
                            auVar815._8_4_ = uVar211;
                            auVar815._12_4_ = uVar211;
                            auVar815._16_4_ = uVar211;
                            auVar815._20_4_ = uVar211;
                            auVar815._24_4_ = uVar211;
                            auVar815._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar684,pauVar245[0x31]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x34 + lVar208);
                            auVar897._4_4_ = uVar211;
                            auVar897._0_4_ = uVar211;
                            auVar897._8_4_ = uVar211;
                            auVar897._12_4_ = uVar211;
                            auVar897._16_4_ = uVar211;
                            auVar897._20_4_ = uVar211;
                            auVar897._24_4_ = uVar211;
                            auVar897._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar815,pauVar245[0x33]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x3c + lVar208);
                            auVar966._4_4_ = uVar211;
                            auVar966._0_4_ = uVar211;
                            auVar966._8_4_ = uVar211;
                            auVar966._12_4_ = uVar211;
                            auVar966._16_4_ = uVar211;
                            auVar966._20_4_ = uVar211;
                            auVar966._24_4_ = uVar211;
                            auVar966._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar897,pauVar245[0x35]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar966,pauVar245[0x37]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x39],auVar684);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x3b],auVar815);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x3d],auVar897);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x3f],auVar966);
                            uVar211 = *(undefined4 *)(lVar200 + 0x44 + lVar208);
                            auVar898._4_4_ = uVar211;
                            auVar898._0_4_ = uVar211;
                            auVar898._8_4_ = uVar211;
                            auVar898._12_4_ = uVar211;
                            auVar898._16_4_ = uVar211;
                            auVar898._20_4_ = uVar211;
                            auVar898._24_4_ = uVar211;
                            auVar898._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x4c + lVar208);
                            auVar445._4_4_ = uVar211;
                            auVar445._0_4_ = uVar211;
                            auVar445._8_4_ = uVar211;
                            auVar445._12_4_ = uVar211;
                            auVar445._16_4_ = uVar211;
                            auVar445._20_4_ = uVar211;
                            auVar445._24_4_ = uVar211;
                            auVar445._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar898,pauVar245[0x39]);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar445,pauVar245[0x3b]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x54 + lVar208);
                            auVar551._4_4_ = uVar211;
                            auVar551._0_4_ = uVar211;
                            auVar551._8_4_ = uVar211;
                            auVar551._12_4_ = uVar211;
                            auVar551._16_4_ = uVar211;
                            auVar551._20_4_ = uVar211;
                            auVar551._24_4_ = uVar211;
                            auVar551._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar551,pauVar245[0x3d]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x5c + lVar208);
                            auVar685._4_4_ = uVar211;
                            auVar685._0_4_ = uVar211;
                            auVar685._8_4_ = uVar211;
                            auVar685._12_4_ = uVar211;
                            auVar685._16_4_ = uVar211;
                            auVar685._20_4_ = uVar211;
                            auVar685._24_4_ = uVar211;
                            auVar685._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar685,pauVar245[0x3f]);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x41],auVar898);
                            uVar211 = *(undefined4 *)(lVar200 + 100 + lVar208);
                            auVar899._4_4_ = uVar211;
                            auVar899._0_4_ = uVar211;
                            auVar899._8_4_ = uVar211;
                            auVar899._12_4_ = uVar211;
                            auVar899._16_4_ = uVar211;
                            auVar899._20_4_ = uVar211;
                            auVar899._24_4_ = uVar211;
                            auVar899._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar899,pauVar245[0x41],ZEXT1632(auVar310));
                            uVar211 = *(undefined4 *)(lVar200 + 0x6c + lVar208);
                            auVar816._4_4_ = uVar211;
                            auVar816._0_4_ = uVar211;
                            auVar816._8_4_ = uVar211;
                            auVar816._12_4_ = uVar211;
                            auVar816._16_4_ = uVar211;
                            auVar816._20_4_ = uVar211;
                            auVar816._24_4_ = uVar211;
                            auVar816._28_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),pauVar245[0x43],auVar445);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x43],auVar816);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x45],auVar551);
                            uVar211 = *(undefined4 *)(lVar200 + 0x74 + lVar208);
                            auVar446._4_4_ = uVar211;
                            auVar446._0_4_ = uVar211;
                            auVar446._8_4_ = uVar211;
                            auVar446._12_4_ = uVar211;
                            auVar446._16_4_ = uVar211;
                            auVar446._20_4_ = uVar211;
                            auVar446._24_4_ = uVar211;
                            auVar446._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x45],auVar446);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),pauVar245[0x47],auVar685);
                            uVar211 = *(undefined4 *)(lVar200 + 0x7c + lVar208);
                            auVar447._4_4_ = uVar211;
                            auVar447._0_4_ = uVar211;
                            auVar447._8_4_ = uVar211;
                            auVar447._12_4_ = uVar211;
                            auVar447._16_4_ = uVar211;
                            auVar447._20_4_ = uVar211;
                            auVar447._24_4_ = uVar211;
                            auVar447._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),pauVar245[0x47],auVar447);
                            *(undefined1 (*) [32])((long)*pauVar236 + lVar208) = ZEXT1632(auVar310);
                            *(undefined1 (*) [32])(pauVar236[1] + lVar208) = ZEXT1632(auVar268);
                            lVar208 = lVar208 + 0x40;
                          }
                          for (; iVar239 < iVar187; iVar239 = iVar239 + 1) {
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                            auVar686._4_4_ = uVar211;
                            auVar686._0_4_ = uVar211;
                            auVar686._8_4_ = uVar211;
                            auVar686._12_4_ = uVar211;
                            auVar686._16_4_ = uVar211;
                            auVar686._20_4_ = uVar211;
                            auVar686._24_4_ = uVar211;
                            auVar686._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                            auVar293._4_4_ = uVar211;
                            auVar293._0_4_ = uVar211;
                            auVar293._8_4_ = uVar211;
                            auVar293._12_4_ = uVar211;
                            auVar293._16_4_ = uVar211;
                            auVar293._20_4_ = uVar211;
                            auVar293._24_4_ = uVar211;
                            auVar293._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                            auVar817._4_4_ = uVar211;
                            auVar817._0_4_ = uVar211;
                            auVar817._8_4_ = uVar211;
                            auVar817._12_4_ = uVar211;
                            auVar817._16_4_ = uVar211;
                            auVar817._20_4_ = uVar211;
                            auVar817._24_4_ = uVar211;
                            auVar817._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                            auVar370._4_4_ = uVar211;
                            auVar370._0_4_ = uVar211;
                            auVar370._8_4_ = uVar211;
                            auVar370._12_4_ = uVar211;
                            auVar370._16_4_ = uVar211;
                            auVar370._20_4_ = uVar211;
                            auVar370._24_4_ = uVar211;
                            auVar370._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                            auVar900._4_4_ = uVar211;
                            auVar900._0_4_ = uVar211;
                            auVar900._8_4_ = uVar211;
                            auVar900._12_4_ = uVar211;
                            auVar900._16_4_ = uVar211;
                            auVar900._20_4_ = uVar211;
                            auVar900._24_4_ = uVar211;
                            auVar900._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                            auVar448._4_4_ = uVar211;
                            auVar448._0_4_ = uVar211;
                            auVar448._8_4_ = uVar211;
                            auVar448._12_4_ = uVar211;
                            auVar448._16_4_ = uVar211;
                            auVar448._20_4_ = uVar211;
                            auVar448._24_4_ = uVar211;
                            auVar448._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x18);
                            auVar967._4_4_ = uVar211;
                            auVar967._0_4_ = uVar211;
                            auVar967._8_4_ = uVar211;
                            auVar967._12_4_ = uVar211;
                            auVar967._16_4_ = uVar211;
                            auVar967._20_4_ = uVar211;
                            auVar967._24_4_ = uVar211;
                            auVar967._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x1c);
                            auVar552._4_4_ = uVar211;
                            auVar552._0_4_ = uVar211;
                            auVar552._8_4_ = uVar211;
                            auVar552._12_4_ = uVar211;
                            auVar552._16_4_ = uVar211;
                            auVar552._20_4_ = uVar211;
                            auVar552._24_4_ = uVar211;
                            auVar552._28_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(*pauVar245,auVar686,
                                                       *(undefined1 (*) [32])
                                                        ((long)*pauVar236 + lVar208));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar817,pauVar245[2]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar900,pauVar245[4]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar967,pauVar245[6]);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x20);
                            auVar687._4_4_ = uVar211;
                            auVar687._0_4_ = uVar211;
                            auVar687._8_4_ = uVar211;
                            auVar687._12_4_ = uVar211;
                            auVar687._16_4_ = uVar211;
                            auVar687._20_4_ = uVar211;
                            auVar687._24_4_ = uVar211;
                            auVar687._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x28);
                            auVar818._4_4_ = uVar211;
                            auVar818._0_4_ = uVar211;
                            auVar818._8_4_ = uVar211;
                            auVar818._12_4_ = uVar211;
                            auVar818._16_4_ = uVar211;
                            auVar818._20_4_ = uVar211;
                            auVar818._24_4_ = uVar211;
                            auVar818._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x30);
                            auVar901._4_4_ = uVar211;
                            auVar901._0_4_ = uVar211;
                            auVar901._8_4_ = uVar211;
                            auVar901._12_4_ = uVar211;
                            auVar901._16_4_ = uVar211;
                            auVar901._20_4_ = uVar211;
                            auVar901._24_4_ = uVar211;
                            auVar901._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x38);
                            auVar968._4_4_ = uVar211;
                            auVar968._0_4_ = uVar211;
                            auVar968._8_4_ = uVar211;
                            auVar968._12_4_ = uVar211;
                            auVar968._16_4_ = uVar211;
                            auVar968._20_4_ = uVar211;
                            auVar968._24_4_ = uVar211;
                            auVar968._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar687,ZEXT1632(auVar268),pauVar245[8]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar818,pauVar245[10]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar901,pauVar245[0xc]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar968,pauVar245[0xe]);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x40);
                            auVar819._4_4_ = uVar211;
                            auVar819._0_4_ = uVar211;
                            auVar819._8_4_ = uVar211;
                            auVar819._12_4_ = uVar211;
                            auVar819._16_4_ = uVar211;
                            auVar819._20_4_ = uVar211;
                            auVar819._24_4_ = uVar211;
                            auVar819._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x48);
                            auVar902._4_4_ = uVar211;
                            auVar902._0_4_ = uVar211;
                            auVar902._8_4_ = uVar211;
                            auVar902._12_4_ = uVar211;
                            auVar902._16_4_ = uVar211;
                            auVar902._20_4_ = uVar211;
                            auVar902._24_4_ = uVar211;
                            auVar902._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x50);
                            auVar969._4_4_ = uVar211;
                            auVar969._0_4_ = uVar211;
                            auVar969._8_4_ = uVar211;
                            auVar969._12_4_ = uVar211;
                            auVar969._16_4_ = uVar211;
                            auVar969._20_4_ = uVar211;
                            auVar969._24_4_ = uVar211;
                            auVar969._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x58);
                            auVar1025._4_4_ = uVar211;
                            auVar1025._0_4_ = uVar211;
                            auVar1025._8_4_ = uVar211;
                            auVar1025._12_4_ = uVar211;
                            auVar1025._16_4_ = uVar211;
                            auVar1025._20_4_ = uVar211;
                            auVar1025._24_4_ = uVar211;
                            auVar1025._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar819,ZEXT1632(auVar268),pauVar245[0x10]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar902,pauVar245[0x12]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar969,pauVar245[0x14]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1025,pauVar245[0x16])
                            ;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                            auVar688._4_4_ = uVar211;
                            auVar688._0_4_ = uVar211;
                            auVar688._8_4_ = uVar211;
                            auVar688._12_4_ = uVar211;
                            auVar688._16_4_ = uVar211;
                            auVar688._20_4_ = uVar211;
                            auVar688._24_4_ = uVar211;
                            auVar688._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                            auVar903._4_4_ = uVar211;
                            auVar903._0_4_ = uVar211;
                            auVar903._8_4_ = uVar211;
                            auVar903._12_4_ = uVar211;
                            auVar903._16_4_ = uVar211;
                            auVar903._20_4_ = uVar211;
                            auVar903._24_4_ = uVar211;
                            auVar903._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                            auVar970._4_4_ = uVar211;
                            auVar970._0_4_ = uVar211;
                            auVar970._8_4_ = uVar211;
                            auVar970._12_4_ = uVar211;
                            auVar970._16_4_ = uVar211;
                            auVar970._20_4_ = uVar211;
                            auVar970._24_4_ = uVar211;
                            auVar970._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x18);
                            auVar1026._4_4_ = uVar211;
                            auVar1026._0_4_ = uVar211;
                            auVar1026._8_4_ = uVar211;
                            auVar1026._12_4_ = uVar211;
                            auVar1026._16_4_ = uVar211;
                            auVar1026._20_4_ = uVar211;
                            auVar1026._24_4_ = uVar211;
                            auVar1026._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar688,ZEXT1632(auVar268),pauVar245[0x18]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar903,pauVar245[0x1a]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar970,pauVar245[0x1c]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1026,pauVar245[0x1e])
                            ;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x20);
                            auVar820._4_4_ = uVar211;
                            auVar820._0_4_ = uVar211;
                            auVar820._8_4_ = uVar211;
                            auVar820._12_4_ = uVar211;
                            auVar820._16_4_ = uVar211;
                            auVar820._20_4_ = uVar211;
                            auVar820._24_4_ = uVar211;
                            auVar820._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x28);
                            auVar904._4_4_ = uVar211;
                            auVar904._0_4_ = uVar211;
                            auVar904._8_4_ = uVar211;
                            auVar904._12_4_ = uVar211;
                            auVar904._16_4_ = uVar211;
                            auVar904._20_4_ = uVar211;
                            auVar904._24_4_ = uVar211;
                            auVar904._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x30);
                            auVar971._4_4_ = uVar211;
                            auVar971._0_4_ = uVar211;
                            auVar971._8_4_ = uVar211;
                            auVar971._12_4_ = uVar211;
                            auVar971._16_4_ = uVar211;
                            auVar971._20_4_ = uVar211;
                            auVar971._24_4_ = uVar211;
                            auVar971._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x38);
                            auVar1027._4_4_ = uVar211;
                            auVar1027._0_4_ = uVar211;
                            auVar1027._8_4_ = uVar211;
                            auVar1027._12_4_ = uVar211;
                            auVar1027._16_4_ = uVar211;
                            auVar1027._20_4_ = uVar211;
                            auVar1027._24_4_ = uVar211;
                            auVar1027._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar820,ZEXT1632(auVar268),pauVar245[0x20]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar904,pauVar245[0x22]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar971,pauVar245[0x24]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1027,pauVar245[0x26])
                            ;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x40);
                            auVar689._4_4_ = uVar211;
                            auVar689._0_4_ = uVar211;
                            auVar689._8_4_ = uVar211;
                            auVar689._12_4_ = uVar211;
                            auVar689._16_4_ = uVar211;
                            auVar689._20_4_ = uVar211;
                            auVar689._24_4_ = uVar211;
                            auVar689._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x48);
                            auVar905._4_4_ = uVar211;
                            auVar905._0_4_ = uVar211;
                            auVar905._8_4_ = uVar211;
                            auVar905._12_4_ = uVar211;
                            auVar905._16_4_ = uVar211;
                            auVar905._20_4_ = uVar211;
                            auVar905._24_4_ = uVar211;
                            auVar905._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x50);
                            auVar972._4_4_ = uVar211;
                            auVar972._0_4_ = uVar211;
                            auVar972._8_4_ = uVar211;
                            auVar972._12_4_ = uVar211;
                            auVar972._16_4_ = uVar211;
                            auVar972._20_4_ = uVar211;
                            auVar972._24_4_ = uVar211;
                            auVar972._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x58);
                            auVar1028._4_4_ = uVar211;
                            auVar1028._0_4_ = uVar211;
                            auVar1028._8_4_ = uVar211;
                            auVar1028._12_4_ = uVar211;
                            auVar1028._16_4_ = uVar211;
                            auVar1028._20_4_ = uVar211;
                            auVar1028._24_4_ = uVar211;
                            auVar1028._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar689,ZEXT1632(auVar268),pauVar245[0x28]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar905,pauVar245[0x2a]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar972,pauVar245[0x2c]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1028,pauVar245[0x2e])
                            ;
                            uVar211 = *(undefined4 *)(lVar200 + lVar208);
                            auVar821._4_4_ = uVar211;
                            auVar821._0_4_ = uVar211;
                            auVar821._8_4_ = uVar211;
                            auVar821._12_4_ = uVar211;
                            auVar821._16_4_ = uVar211;
                            auVar821._20_4_ = uVar211;
                            auVar821._24_4_ = uVar211;
                            auVar821._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                            auVar906._4_4_ = uVar211;
                            auVar906._0_4_ = uVar211;
                            auVar906._8_4_ = uVar211;
                            auVar906._12_4_ = uVar211;
                            auVar906._16_4_ = uVar211;
                            auVar906._20_4_ = uVar211;
                            auVar906._24_4_ = uVar211;
                            auVar906._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                            auVar973._4_4_ = uVar211;
                            auVar973._0_4_ = uVar211;
                            auVar973._8_4_ = uVar211;
                            auVar973._12_4_ = uVar211;
                            auVar973._16_4_ = uVar211;
                            auVar973._20_4_ = uVar211;
                            auVar973._24_4_ = uVar211;
                            auVar973._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x18 + lVar208);
                            auVar1029._4_4_ = uVar211;
                            auVar1029._0_4_ = uVar211;
                            auVar1029._8_4_ = uVar211;
                            auVar1029._12_4_ = uVar211;
                            auVar1029._16_4_ = uVar211;
                            auVar1029._20_4_ = uVar211;
                            auVar1029._24_4_ = uVar211;
                            auVar1029._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar821,ZEXT1632(auVar268),pauVar245[0x30]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar906,pauVar245[0x32]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar973,pauVar245[0x34]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1029,pauVar245[0x36])
                            ;
                            uVar211 = *(undefined4 *)(lVar200 + 0x20 + lVar208);
                            auVar690._4_4_ = uVar211;
                            auVar690._0_4_ = uVar211;
                            auVar690._8_4_ = uVar211;
                            auVar690._12_4_ = uVar211;
                            auVar690._16_4_ = uVar211;
                            auVar690._20_4_ = uVar211;
                            auVar690._24_4_ = uVar211;
                            auVar690._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x28 + lVar208);
                            auVar907._4_4_ = uVar211;
                            auVar907._0_4_ = uVar211;
                            auVar907._8_4_ = uVar211;
                            auVar907._12_4_ = uVar211;
                            auVar907._16_4_ = uVar211;
                            auVar907._20_4_ = uVar211;
                            auVar907._24_4_ = uVar211;
                            auVar907._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x30 + lVar208);
                            auVar974._4_4_ = uVar211;
                            auVar974._0_4_ = uVar211;
                            auVar974._8_4_ = uVar211;
                            auVar974._12_4_ = uVar211;
                            auVar974._16_4_ = uVar211;
                            auVar974._20_4_ = uVar211;
                            auVar974._24_4_ = uVar211;
                            auVar974._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x38 + lVar208);
                            auVar1030._4_4_ = uVar211;
                            auVar1030._0_4_ = uVar211;
                            auVar1030._8_4_ = uVar211;
                            auVar1030._12_4_ = uVar211;
                            auVar1030._16_4_ = uVar211;
                            auVar1030._20_4_ = uVar211;
                            auVar1030._24_4_ = uVar211;
                            auVar1030._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar690,ZEXT1632(auVar268),pauVar245[0x38]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar907,pauVar245[0x3a]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar974,pauVar245[0x3c]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1030,pauVar245[0x3e])
                            ;
                            uVar211 = *(undefined4 *)(lVar200 + 0x40 + lVar208);
                            auVar822._4_4_ = uVar211;
                            auVar822._0_4_ = uVar211;
                            auVar822._8_4_ = uVar211;
                            auVar822._12_4_ = uVar211;
                            auVar822._16_4_ = uVar211;
                            auVar822._20_4_ = uVar211;
                            auVar822._24_4_ = uVar211;
                            auVar822._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x48 + lVar208);
                            auVar908._4_4_ = uVar211;
                            auVar908._0_4_ = uVar211;
                            auVar908._8_4_ = uVar211;
                            auVar908._12_4_ = uVar211;
                            auVar908._16_4_ = uVar211;
                            auVar908._20_4_ = uVar211;
                            auVar908._24_4_ = uVar211;
                            auVar908._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x50 + lVar208);
                            auVar975._4_4_ = uVar211;
                            auVar975._0_4_ = uVar211;
                            auVar975._8_4_ = uVar211;
                            auVar975._12_4_ = uVar211;
                            auVar975._16_4_ = uVar211;
                            auVar975._20_4_ = uVar211;
                            auVar975._24_4_ = uVar211;
                            auVar975._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x58 + lVar208);
                            auVar1031._4_4_ = uVar211;
                            auVar1031._0_4_ = uVar211;
                            auVar1031._8_4_ = uVar211;
                            auVar1031._12_4_ = uVar211;
                            auVar1031._16_4_ = uVar211;
                            auVar1031._20_4_ = uVar211;
                            auVar1031._24_4_ = uVar211;
                            auVar1031._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar822,ZEXT1632(auVar268),pauVar245[0x40]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar908,pauVar245[0x42]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar975,pauVar245[0x44]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1031,pauVar245[0x46])
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar293,pauVar245[1]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar370,pauVar245[3]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar448,pauVar245[5]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar552,pauVar245[7]);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x24);
                            auVar294._4_4_ = uVar211;
                            auVar294._0_4_ = uVar211;
                            auVar294._8_4_ = uVar211;
                            auVar294._12_4_ = uVar211;
                            auVar294._16_4_ = uVar211;
                            auVar294._20_4_ = uVar211;
                            auVar294._24_4_ = uVar211;
                            auVar294._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x2c);
                            auVar371._4_4_ = uVar211;
                            auVar371._0_4_ = uVar211;
                            auVar371._8_4_ = uVar211;
                            auVar371._12_4_ = uVar211;
                            auVar371._16_4_ = uVar211;
                            auVar371._20_4_ = uVar211;
                            auVar371._24_4_ = uVar211;
                            auVar371._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x34);
                            auVar449._4_4_ = uVar211;
                            auVar449._0_4_ = uVar211;
                            auVar449._8_4_ = uVar211;
                            auVar449._12_4_ = uVar211;
                            auVar449._16_4_ = uVar211;
                            auVar449._20_4_ = uVar211;
                            auVar449._24_4_ = uVar211;
                            auVar449._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x3c);
                            auVar553._4_4_ = uVar211;
                            auVar553._0_4_ = uVar211;
                            auVar553._8_4_ = uVar211;
                            auVar553._12_4_ = uVar211;
                            auVar553._16_4_ = uVar211;
                            auVar553._20_4_ = uVar211;
                            auVar553._24_4_ = uVar211;
                            auVar553._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar294,ZEXT1632(auVar268),pauVar245[9]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar371,pauVar245[0xb]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar449,pauVar245[0xd]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar553,pauVar245[0xf]);
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x44);
                            auVar372._4_4_ = uVar211;
                            auVar372._0_4_ = uVar211;
                            auVar372._8_4_ = uVar211;
                            auVar372._12_4_ = uVar211;
                            auVar372._16_4_ = uVar211;
                            auVar372._20_4_ = uVar211;
                            auVar372._24_4_ = uVar211;
                            auVar372._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x4c);
                            auVar450._4_4_ = uVar211;
                            auVar450._0_4_ = uVar211;
                            auVar450._8_4_ = uVar211;
                            auVar450._12_4_ = uVar211;
                            auVar450._16_4_ = uVar211;
                            auVar450._20_4_ = uVar211;
                            auVar450._24_4_ = uVar211;
                            auVar450._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x54);
                            auVar554._4_4_ = uVar211;
                            auVar554._0_4_ = uVar211;
                            auVar554._8_4_ = uVar211;
                            auVar554._12_4_ = uVar211;
                            auVar554._16_4_ = uVar211;
                            auVar554._20_4_ = uVar211;
                            auVar554._24_4_ = uVar211;
                            auVar554._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x5c);
                            auVar691._4_4_ = uVar211;
                            auVar691._0_4_ = uVar211;
                            auVar691._8_4_ = uVar211;
                            auVar691._12_4_ = uVar211;
                            auVar691._16_4_ = uVar211;
                            auVar691._20_4_ = uVar211;
                            auVar691._24_4_ = uVar211;
                            auVar691._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar372,ZEXT1632(auVar268),pauVar245[0x11]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar450,pauVar245[0x13]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar554,pauVar245[0x15]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar691,pauVar245[0x17]);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                            auVar295._4_4_ = uVar211;
                            auVar295._0_4_ = uVar211;
                            auVar295._8_4_ = uVar211;
                            auVar295._12_4_ = uVar211;
                            auVar295._16_4_ = uVar211;
                            auVar295._20_4_ = uVar211;
                            auVar295._24_4_ = uVar211;
                            auVar295._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                            auVar451._4_4_ = uVar211;
                            auVar451._0_4_ = uVar211;
                            auVar451._8_4_ = uVar211;
                            auVar451._12_4_ = uVar211;
                            auVar451._16_4_ = uVar211;
                            auVar451._20_4_ = uVar211;
                            auVar451._24_4_ = uVar211;
                            auVar451._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                            auVar555._4_4_ = uVar211;
                            auVar555._0_4_ = uVar211;
                            auVar555._8_4_ = uVar211;
                            auVar555._12_4_ = uVar211;
                            auVar555._16_4_ = uVar211;
                            auVar555._20_4_ = uVar211;
                            auVar555._24_4_ = uVar211;
                            auVar555._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x1c);
                            auVar692._4_4_ = uVar211;
                            auVar692._0_4_ = uVar211;
                            auVar692._8_4_ = uVar211;
                            auVar692._12_4_ = uVar211;
                            auVar692._16_4_ = uVar211;
                            auVar692._20_4_ = uVar211;
                            auVar692._24_4_ = uVar211;
                            auVar692._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar295,ZEXT1632(auVar268),pauVar245[0x19]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar451,pauVar245[0x1b]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar555,pauVar245[0x1d]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar692,pauVar245[0x1f]);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x24);
                            auVar373._4_4_ = uVar211;
                            auVar373._0_4_ = uVar211;
                            auVar373._8_4_ = uVar211;
                            auVar373._12_4_ = uVar211;
                            auVar373._16_4_ = uVar211;
                            auVar373._20_4_ = uVar211;
                            auVar373._24_4_ = uVar211;
                            auVar373._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x2c);
                            auVar452._4_4_ = uVar211;
                            auVar452._0_4_ = uVar211;
                            auVar452._8_4_ = uVar211;
                            auVar452._12_4_ = uVar211;
                            auVar452._16_4_ = uVar211;
                            auVar452._20_4_ = uVar211;
                            auVar452._24_4_ = uVar211;
                            auVar452._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x34);
                            auVar556._4_4_ = uVar211;
                            auVar556._0_4_ = uVar211;
                            auVar556._8_4_ = uVar211;
                            auVar556._12_4_ = uVar211;
                            auVar556._16_4_ = uVar211;
                            auVar556._20_4_ = uVar211;
                            auVar556._24_4_ = uVar211;
                            auVar556._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x3c);
                            auVar693._4_4_ = uVar211;
                            auVar693._0_4_ = uVar211;
                            auVar693._8_4_ = uVar211;
                            auVar693._12_4_ = uVar211;
                            auVar693._16_4_ = uVar211;
                            auVar693._20_4_ = uVar211;
                            auVar693._24_4_ = uVar211;
                            auVar693._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar373,ZEXT1632(auVar268),pauVar245[0x21]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar452,pauVar245[0x23]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar556,pauVar245[0x25]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar693,pauVar245[0x27]);
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x44);
                            auVar296._4_4_ = uVar211;
                            auVar296._0_4_ = uVar211;
                            auVar296._8_4_ = uVar211;
                            auVar296._12_4_ = uVar211;
                            auVar296._16_4_ = uVar211;
                            auVar296._20_4_ = uVar211;
                            auVar296._24_4_ = uVar211;
                            auVar296._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x4c);
                            auVar453._4_4_ = uVar211;
                            auVar453._0_4_ = uVar211;
                            auVar453._8_4_ = uVar211;
                            auVar453._12_4_ = uVar211;
                            auVar453._16_4_ = uVar211;
                            auVar453._20_4_ = uVar211;
                            auVar453._24_4_ = uVar211;
                            auVar453._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x54);
                            auVar557._4_4_ = uVar211;
                            auVar557._0_4_ = uVar211;
                            auVar557._8_4_ = uVar211;
                            auVar557._12_4_ = uVar211;
                            auVar557._16_4_ = uVar211;
                            auVar557._20_4_ = uVar211;
                            auVar557._24_4_ = uVar211;
                            auVar557._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x5c);
                            auVar694._4_4_ = uVar211;
                            auVar694._0_4_ = uVar211;
                            auVar694._8_4_ = uVar211;
                            auVar694._12_4_ = uVar211;
                            auVar694._16_4_ = uVar211;
                            auVar694._20_4_ = uVar211;
                            auVar694._24_4_ = uVar211;
                            auVar694._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar296,ZEXT1632(auVar268),pauVar245[0x29]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar453,pauVar245[0x2b]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar557,pauVar245[0x2d]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar694,pauVar245[0x2f]);
                            uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                            auVar374._4_4_ = uVar211;
                            auVar374._0_4_ = uVar211;
                            auVar374._8_4_ = uVar211;
                            auVar374._12_4_ = uVar211;
                            auVar374._16_4_ = uVar211;
                            auVar374._20_4_ = uVar211;
                            auVar374._24_4_ = uVar211;
                            auVar374._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                            auVar454._4_4_ = uVar211;
                            auVar454._0_4_ = uVar211;
                            auVar454._8_4_ = uVar211;
                            auVar454._12_4_ = uVar211;
                            auVar454._16_4_ = uVar211;
                            auVar454._20_4_ = uVar211;
                            auVar454._24_4_ = uVar211;
                            auVar454._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                            auVar558._4_4_ = uVar211;
                            auVar558._0_4_ = uVar211;
                            auVar558._8_4_ = uVar211;
                            auVar558._12_4_ = uVar211;
                            auVar558._16_4_ = uVar211;
                            auVar558._20_4_ = uVar211;
                            auVar558._24_4_ = uVar211;
                            auVar558._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x1c + lVar208);
                            auVar695._4_4_ = uVar211;
                            auVar695._0_4_ = uVar211;
                            auVar695._8_4_ = uVar211;
                            auVar695._12_4_ = uVar211;
                            auVar695._16_4_ = uVar211;
                            auVar695._20_4_ = uVar211;
                            auVar695._24_4_ = uVar211;
                            auVar695._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar374,ZEXT1632(auVar268),pauVar245[0x31]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar454,pauVar245[0x33]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar558,pauVar245[0x35]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar695,pauVar245[0x37]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x24 + lVar208);
                            auVar297._4_4_ = uVar211;
                            auVar297._0_4_ = uVar211;
                            auVar297._8_4_ = uVar211;
                            auVar297._12_4_ = uVar211;
                            auVar297._16_4_ = uVar211;
                            auVar297._20_4_ = uVar211;
                            auVar297._24_4_ = uVar211;
                            auVar297._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x2c + lVar208);
                            auVar455._4_4_ = uVar211;
                            auVar455._0_4_ = uVar211;
                            auVar455._8_4_ = uVar211;
                            auVar455._12_4_ = uVar211;
                            auVar455._16_4_ = uVar211;
                            auVar455._20_4_ = uVar211;
                            auVar455._24_4_ = uVar211;
                            auVar455._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x34 + lVar208);
                            auVar559._4_4_ = uVar211;
                            auVar559._0_4_ = uVar211;
                            auVar559._8_4_ = uVar211;
                            auVar559._12_4_ = uVar211;
                            auVar559._16_4_ = uVar211;
                            auVar559._20_4_ = uVar211;
                            auVar559._24_4_ = uVar211;
                            auVar559._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x3c + lVar208);
                            auVar696._4_4_ = uVar211;
                            auVar696._0_4_ = uVar211;
                            auVar696._8_4_ = uVar211;
                            auVar696._12_4_ = uVar211;
                            auVar696._16_4_ = uVar211;
                            auVar696._20_4_ = uVar211;
                            auVar696._24_4_ = uVar211;
                            auVar696._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar297,ZEXT1632(auVar268),pauVar245[0x39]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar455,pauVar245[0x3b]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar559,pauVar245[0x3d]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar696,pauVar245[0x3f]);
                            uVar211 = *(undefined4 *)(lVar200 + 0x44 + lVar208);
                            auVar375._4_4_ = uVar211;
                            auVar375._0_4_ = uVar211;
                            auVar375._8_4_ = uVar211;
                            auVar375._12_4_ = uVar211;
                            auVar375._16_4_ = uVar211;
                            auVar375._20_4_ = uVar211;
                            auVar375._24_4_ = uVar211;
                            auVar375._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x4c + lVar208);
                            auVar456._4_4_ = uVar211;
                            auVar456._0_4_ = uVar211;
                            auVar456._8_4_ = uVar211;
                            auVar456._12_4_ = uVar211;
                            auVar456._16_4_ = uVar211;
                            auVar456._20_4_ = uVar211;
                            auVar456._24_4_ = uVar211;
                            auVar456._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x54 + lVar208);
                            auVar560._4_4_ = uVar211;
                            auVar560._0_4_ = uVar211;
                            auVar560._8_4_ = uVar211;
                            auVar560._12_4_ = uVar211;
                            auVar560._16_4_ = uVar211;
                            auVar560._20_4_ = uVar211;
                            auVar560._24_4_ = uVar211;
                            auVar560._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(lVar200 + 0x5c + lVar208);
                            auVar697._4_4_ = uVar211;
                            auVar697._0_4_ = uVar211;
                            auVar697._8_4_ = uVar211;
                            auVar697._12_4_ = uVar211;
                            auVar697._16_4_ = uVar211;
                            auVar697._20_4_ = uVar211;
                            auVar697._24_4_ = uVar211;
                            auVar697._28_4_ = uVar211;
                            auVar268 = vfmadd132ps_fma(auVar375,ZEXT1632(auVar268),pauVar245[0x41]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar456,pauVar245[0x43]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar560,pauVar245[0x45]);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar697,pauVar245[0x47]);
                            *(undefined1 (*) [32])((long)*pauVar236 + lVar208) = ZEXT1632(auVar268);
                            lVar208 = lVar208 + 0x20;
                          }
                          piVar222 = (int *)((long)piVar222 + lVar208 + 0x40);
                          piVar255 = (int *)((long)piVar255 + lVar208 + 0x40);
                          lVar200 = lVar200 + lVar208 + 0x40;
                          pauVar236 = (undefined1 (*) [32])((long)*pauVar236 + lVar208);
                        }
                      }
                    }
                    pLVar233 = this->activation;
                  }
                  else {
                    auVar268 = vpcmpeqd_avx(auVar945,_DAT_005352c0);
                    uVar211 = vmovmskps_avx(auVar268);
                    bVar186 = false;
                    if (((((auVar945._4_4_ == 2 && auVar945._0_4_ == 2) && iVar249 == 1) &&
                         iVar257 == 1) & (byte)uVar211 >> 2 & (byte)uVar211 >> 3) != 1)
                    goto LAB_001c05c0;
                    iVar187 = top_blob->w;
                    uVar259 = top_blob->h;
                    if (top_blob->h < 1) {
                      uVar259 = 0;
                    }
                    pvVar204 = (this->super_Convolution).bias_data.data;
                    local_a40._0_4_ = SUB84(pvVar204,0);
                    local_a40._4_4_ = (int)((ulong)pvVar204 >> 0x20);
                    uVar244 = local_920.c;
                    if (local_920.c < 1) {
                      uVar244 = 0;
                    }
                    uVar247 = top_blob->c;
                    if (top_blob->c < 1) {
                      uVar247 = 0;
                    }
                    for (uVar210 = 0; uVar210 != uVar247; uVar210 = uVar210 + 1) {
                      uVar196 = (long)top_blob->h * (long)top_blob->w;
                      uVar209 = top_blob->elemsize;
                      uVar229 = (uVar209 * uVar196 + 0xf & 0xfffffffffffffff0) / uVar209;
                      if (top_blob->dims == 4) {
                        uVar229 = uVar196;
                      }
                      if (pvVar204 == (void *)0x0) {
                        auVar376 = ZEXT1632(ZEXT816(0) << 0x40);
                      }
                      else {
                        auVar376 = *(undefined1 (*) [32])((long)pvVar204 + uVar210 * 0x20);
                      }
                      pauVar253 = (undefined1 (*) [32])
                                  (top_blob->cstep * uVar210 * uVar209 + (long)top_blob->data);
                      iVar257 = (int)uVar229 * top_blob->d;
                      pauVar236 = pauVar253;
                      if (iVar257 < 1) {
                        iVar257 = 0;
                      }
                      while (bVar186 = iVar257 != 0, iVar257 = iVar257 + -1, bVar186) {
                        *pauVar236 = auVar376;
                        pauVar236 = pauVar236 + 1;
                      }
                      for (uVar209 = 0; uVar209 != uVar244; uVar209 = uVar209 + 1) {
                        piVar255 = (int *)(local_920.cstep * uVar209 * local_920.elemsize +
                                          (long)local_920.data);
                        sVar13 = (this->weight_data_tm).elemsize;
                        lVar208 = (this->weight_data_tm).cstep * uVar210 * sVar13;
                        pvVar251 = (this->weight_data_tm).data;
                        lVar200 = (long)(this->weight_data_tm).w * uVar209 * sVar13;
                        pauVar236 = pauVar253;
                        piVar222 = (int *)((long)local_920.w * local_920.elemsize + (long)piVar255);
                        for (uVar250 = 0; uVar250 != uVar259; uVar250 = uVar250 + 1) {
                          piVar223 = piVar255 + 8;
                          piVar227 = piVar222 + 8;
                          for (iVar257 = 0; iVar257 + 1 < iVar187; iVar257 = iVar257 + 2) {
                            iVar188 = *piVar255;
                            auVar377._4_4_ = iVar188;
                            auVar377._0_4_ = iVar188;
                            auVar377._8_4_ = iVar188;
                            auVar377._12_4_ = iVar188;
                            auVar377._16_4_ = iVar188;
                            auVar377._20_4_ = iVar188;
                            auVar377._24_4_ = iVar188;
                            auVar377._28_4_ = iVar188;
                            iVar188 = piVar255[1];
                            auVar460._4_4_ = iVar188;
                            auVar460._0_4_ = iVar188;
                            auVar460._8_4_ = iVar188;
                            auVar460._12_4_ = iVar188;
                            auVar460._16_4_ = iVar188;
                            auVar460._20_4_ = iVar188;
                            auVar460._24_4_ = iVar188;
                            auVar460._28_4_ = iVar188;
                            iVar188 = piVar255[2];
                            auVar566._4_4_ = iVar188;
                            auVar566._0_4_ = iVar188;
                            auVar566._8_4_ = iVar188;
                            auVar566._12_4_ = iVar188;
                            auVar566._16_4_ = iVar188;
                            auVar566._20_4_ = iVar188;
                            auVar566._24_4_ = iVar188;
                            auVar566._28_4_ = iVar188;
                            iVar188 = piVar255[3];
                            auVar710._4_4_ = iVar188;
                            auVar710._0_4_ = iVar188;
                            auVar710._8_4_ = iVar188;
                            auVar710._12_4_ = iVar188;
                            auVar710._16_4_ = iVar188;
                            auVar710._20_4_ = iVar188;
                            auVar710._24_4_ = iVar188;
                            auVar710._28_4_ = iVar188;
                            iVar188 = piVar255[4];
                            auVar827._4_4_ = iVar188;
                            auVar827._0_4_ = iVar188;
                            auVar827._8_4_ = iVar188;
                            auVar827._12_4_ = iVar188;
                            auVar827._16_4_ = iVar188;
                            auVar827._20_4_ = iVar188;
                            auVar827._24_4_ = iVar188;
                            auVar827._28_4_ = iVar188;
                            iVar188 = piVar255[5];
                            auVar1180._4_4_ = iVar188;
                            auVar1180._0_4_ = iVar188;
                            auVar1180._8_4_ = iVar188;
                            auVar1180._12_4_ = iVar188;
                            auVar1180._16_4_ = iVar188;
                            auVar1180._20_4_ = iVar188;
                            auVar1180._24_4_ = iVar188;
                            auVar1180._28_4_ = iVar188;
                            iVar188 = piVar255[6];
                            auVar1342._4_4_ = iVar188;
                            auVar1342._0_4_ = iVar188;
                            auVar1342._8_4_ = iVar188;
                            auVar1342._12_4_ = iVar188;
                            auVar1342._16_4_ = iVar188;
                            auVar1342._20_4_ = iVar188;
                            auVar1342._24_4_ = iVar188;
                            auVar1342._28_4_ = iVar188;
                            iVar188 = piVar255[7];
                            auVar376 = *(undefined1 (*) [32])((long)pvVar251 + lVar200 + lVar208);
                            auVar1215 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x20);
                            auVar1449 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x40);
                            auVar1485 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x60);
                            auVar268 = vfmadd213ps_fma(auVar377,auVar376,*pauVar236);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar460);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar566);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar710);
                            auVar613 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x80);
                            auVar593 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0xa0);
                            auVar304 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0xc0);
                            auVar594 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0xe0);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar827);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1180);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1342);
                            iVar239 = piVar255[8];
                            auVar461._4_4_ = iVar239;
                            auVar461._0_4_ = iVar239;
                            auVar461._8_4_ = iVar239;
                            auVar461._12_4_ = iVar239;
                            auVar461._16_4_ = iVar239;
                            auVar461._20_4_ = iVar239;
                            auVar461._24_4_ = iVar239;
                            auVar461._28_4_ = iVar239;
                            iVar239 = piVar255[9];
                            auVar1478._4_4_ = iVar239;
                            auVar1478._0_4_ = iVar239;
                            auVar1478._8_4_ = iVar239;
                            auVar1478._12_4_ = iVar239;
                            auVar1478._16_4_ = iVar239;
                            auVar1478._20_4_ = iVar239;
                            auVar1478._24_4_ = iVar239;
                            auVar1478._28_4_ = iVar239;
                            iVar239 = piVar255[10];
                            auVar1343._4_4_ = iVar239;
                            auVar1343._0_4_ = iVar239;
                            auVar1343._8_4_ = iVar239;
                            auVar1343._12_4_ = iVar239;
                            auVar1343._16_4_ = iVar239;
                            auVar1343._20_4_ = iVar239;
                            auVar1343._24_4_ = iVar239;
                            auVar1343._28_4_ = iVar239;
                            iVar239 = piVar255[0xb];
                            auVar1181._4_4_ = iVar239;
                            auVar1181._0_4_ = iVar239;
                            auVar1181._8_4_ = iVar239;
                            auVar1181._12_4_ = iVar239;
                            auVar1181._16_4_ = iVar239;
                            auVar1181._20_4_ = iVar239;
                            auVar1181._24_4_ = iVar239;
                            auVar1181._28_4_ = iVar239;
                            iVar239 = piVar255[0xc];
                            auVar828._4_4_ = iVar239;
                            auVar828._0_4_ = iVar239;
                            auVar828._8_4_ = iVar239;
                            auVar828._12_4_ = iVar239;
                            auVar828._16_4_ = iVar239;
                            auVar828._20_4_ = iVar239;
                            auVar828._24_4_ = iVar239;
                            auVar828._28_4_ = iVar239;
                            iVar239 = piVar255[0xd];
                            auVar567._4_4_ = iVar239;
                            auVar567._0_4_ = iVar239;
                            auVar567._8_4_ = iVar239;
                            auVar567._12_4_ = iVar239;
                            auVar567._16_4_ = iVar239;
                            auVar567._20_4_ = iVar239;
                            auVar567._24_4_ = iVar239;
                            auVar567._28_4_ = iVar239;
                            auVar268 = vfmadd213ps_fma(auVar376,auVar461,pauVar236[1]);
                            iVar239 = piVar255[0xe];
                            auVar711._4_4_ = iVar239;
                            auVar711._0_4_ = iVar239;
                            auVar711._8_4_ = iVar239;
                            auVar711._12_4_ = iVar239;
                            auVar711._16_4_ = iVar239;
                            auVar711._20_4_ = iVar239;
                            auVar711._24_4_ = iVar239;
                            auVar711._28_4_ = iVar239;
                            auVar51._4_4_ = iVar188;
                            auVar51._0_4_ = iVar188;
                            auVar51._8_4_ = iVar188;
                            auVar51._12_4_ = iVar188;
                            auVar51._16_4_ = iVar188;
                            auVar51._20_4_ = iVar188;
                            auVar51._24_4_ = iVar188;
                            auVar51._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar594,auVar51);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1478,auVar1215);
                            iVar188 = piVar255[0xf];
                            auVar1036._4_4_ = iVar188;
                            auVar1036._0_4_ = iVar188;
                            auVar1036._8_4_ = iVar188;
                            auVar1036._12_4_ = iVar188;
                            auVar1036._16_4_ = iVar188;
                            auVar1036._20_4_ = iVar188;
                            auVar1036._24_4_ = iVar188;
                            auVar1036._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1343,auVar1449);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1181,auVar1485);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar828,auVar613);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar567,auVar593);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar711,auVar304);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1036,auVar594);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x100);
                            auVar1215 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x120);
                            auVar1449 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x140);
                            auVar1485 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x160);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar461);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1215,auVar1478);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1449,auVar1343);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1485,auVar1181);
                            auVar613 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x180);
                            auVar593 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1a0);
                            auVar304 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1c0);
                            auVar594 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1e0);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar613,auVar828);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar593,auVar567);
                            iVar188 = piVar255[0x10];
                            auVar462._4_4_ = iVar188;
                            auVar462._0_4_ = iVar188;
                            auVar462._8_4_ = iVar188;
                            auVar462._12_4_ = iVar188;
                            auVar462._16_4_ = iVar188;
                            auVar462._20_4_ = iVar188;
                            auVar462._24_4_ = iVar188;
                            auVar462._28_4_ = iVar188;
                            iVar188 = piVar255[0x11];
                            auVar568._4_4_ = iVar188;
                            auVar568._0_4_ = iVar188;
                            auVar568._8_4_ = iVar188;
                            auVar568._12_4_ = iVar188;
                            auVar568._16_4_ = iVar188;
                            auVar568._20_4_ = iVar188;
                            auVar568._24_4_ = iVar188;
                            auVar568._28_4_ = iVar188;
                            iVar188 = piVar255[0x12];
                            auVar829._4_4_ = iVar188;
                            auVar829._0_4_ = iVar188;
                            auVar829._8_4_ = iVar188;
                            auVar829._12_4_ = iVar188;
                            auVar829._16_4_ = iVar188;
                            auVar829._20_4_ = iVar188;
                            auVar829._24_4_ = iVar188;
                            auVar829._28_4_ = iVar188;
                            iVar188 = piVar255[0x13];
                            auVar1479._4_4_ = iVar188;
                            auVar1479._0_4_ = iVar188;
                            auVar1479._8_4_ = iVar188;
                            auVar1479._12_4_ = iVar188;
                            auVar1479._16_4_ = iVar188;
                            auVar1479._20_4_ = iVar188;
                            auVar1479._24_4_ = iVar188;
                            auVar1479._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar304,auVar711);
                            iVar188 = piVar255[0x14];
                            auVar712._4_4_ = iVar188;
                            auVar712._0_4_ = iVar188;
                            auVar712._8_4_ = iVar188;
                            auVar712._12_4_ = iVar188;
                            auVar712._16_4_ = iVar188;
                            auVar712._20_4_ = iVar188;
                            auVar712._24_4_ = iVar188;
                            auVar712._28_4_ = iVar188;
                            auVar268 = vfmadd213ps_fma(auVar462,auVar376,ZEXT1632(auVar268));
                            iVar188 = piVar255[0x15];
                            auVar298._4_4_ = iVar188;
                            auVar298._0_4_ = iVar188;
                            auVar298._8_4_ = iVar188;
                            auVar298._12_4_ = iVar188;
                            auVar298._16_4_ = iVar188;
                            auVar298._20_4_ = iVar188;
                            auVar298._24_4_ = iVar188;
                            auVar298._28_4_ = iVar188;
                            iVar188 = piVar255[0x16];
                            auVar1421._4_4_ = iVar188;
                            auVar1421._0_4_ = iVar188;
                            auVar1421._8_4_ = iVar188;
                            auVar1421._12_4_ = iVar188;
                            auVar1421._16_4_ = iVar188;
                            auVar1421._20_4_ = iVar188;
                            auVar1421._24_4_ = iVar188;
                            auVar1421._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar594,auVar1036);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar568);
                            iVar188 = piVar255[0x17];
                            auVar569._4_4_ = iVar188;
                            auVar569._0_4_ = iVar188;
                            auVar569._8_4_ = iVar188;
                            auVar569._12_4_ = iVar188;
                            auVar569._16_4_ = iVar188;
                            auVar569._20_4_ = iVar188;
                            auVar569._24_4_ = iVar188;
                            auVar569._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar829);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1479);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar712);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar298);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1421);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar569);
                            iVar188 = *piVar222;
                            auVar299._4_4_ = iVar188;
                            auVar299._0_4_ = iVar188;
                            auVar299._8_4_ = iVar188;
                            auVar299._12_4_ = iVar188;
                            auVar299._16_4_ = iVar188;
                            auVar299._20_4_ = iVar188;
                            auVar299._24_4_ = iVar188;
                            auVar299._28_4_ = iVar188;
                            iVar188 = piVar222[1];
                            auVar713._4_4_ = iVar188;
                            auVar713._0_4_ = iVar188;
                            auVar713._8_4_ = iVar188;
                            auVar713._12_4_ = iVar188;
                            auVar713._16_4_ = iVar188;
                            auVar713._20_4_ = iVar188;
                            auVar713._24_4_ = iVar188;
                            auVar713._28_4_ = iVar188;
                            iVar188 = piVar222[2];
                            auVar981._4_4_ = iVar188;
                            auVar981._0_4_ = iVar188;
                            auVar981._8_4_ = iVar188;
                            auVar981._12_4_ = iVar188;
                            auVar981._16_4_ = iVar188;
                            auVar981._20_4_ = iVar188;
                            auVar981._24_4_ = iVar188;
                            auVar981._28_4_ = iVar188;
                            iVar188 = piVar222[3];
                            auVar1037._4_4_ = iVar188;
                            auVar1037._0_4_ = iVar188;
                            auVar1037._8_4_ = iVar188;
                            auVar1037._12_4_ = iVar188;
                            auVar1037._16_4_ = iVar188;
                            auVar1037._20_4_ = iVar188;
                            auVar1037._24_4_ = iVar188;
                            auVar1037._28_4_ = iVar188;
                            iVar188 = piVar222[4];
                            auVar1344._4_4_ = iVar188;
                            auVar1344._0_4_ = iVar188;
                            auVar1344._8_4_ = iVar188;
                            auVar1344._12_4_ = iVar188;
                            auVar1344._16_4_ = iVar188;
                            auVar1344._20_4_ = iVar188;
                            auVar1344._24_4_ = iVar188;
                            auVar1344._28_4_ = iVar188;
                            iVar188 = piVar222[5];
                            auVar1422._4_4_ = iVar188;
                            auVar1422._0_4_ = iVar188;
                            auVar1422._8_4_ = iVar188;
                            auVar1422._12_4_ = iVar188;
                            auVar1422._16_4_ = iVar188;
                            auVar1422._20_4_ = iVar188;
                            auVar1422._24_4_ = iVar188;
                            auVar1422._28_4_ = iVar188;
                            iVar188 = piVar222[6];
                            auVar1480._4_4_ = iVar188;
                            auVar1480._0_4_ = iVar188;
                            auVar1480._8_4_ = iVar188;
                            auVar1480._12_4_ = iVar188;
                            auVar1480._16_4_ = iVar188;
                            auVar1480._20_4_ = iVar188;
                            auVar1480._24_4_ = iVar188;
                            auVar1480._28_4_ = iVar188;
                            iVar188 = piVar222[7];
                            auVar1499._4_4_ = iVar188;
                            auVar1499._0_4_ = iVar188;
                            auVar1499._8_4_ = iVar188;
                            auVar1499._12_4_ = iVar188;
                            auVar1499._16_4_ = iVar188;
                            auVar1499._20_4_ = iVar188;
                            auVar1499._24_4_ = iVar188;
                            auVar1499._28_4_ = iVar188;
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x200);
                            auVar1215 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x220);
                            auVar1449 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x240);
                            auVar1485 = *(undefined1 (*) [32])
                                         ((long)pvVar251 + lVar200 + lVar208 + 0x260);
                            auVar268 = vfmadd213ps_fma(auVar299,auVar376,ZEXT1632(auVar310));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar713);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar981);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1037);
                            auVar613 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x280);
                            auVar593 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2a0);
                            auVar304 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2c0);
                            auVar594 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2e0);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1344);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1422);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1480);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1499);
                            iVar188 = piVar222[8];
                            auVar1481._4_4_ = iVar188;
                            auVar1481._0_4_ = iVar188;
                            auVar1481._8_4_ = iVar188;
                            auVar1481._12_4_ = iVar188;
                            auVar1481._16_4_ = iVar188;
                            auVar1481._20_4_ = iVar188;
                            auVar1481._24_4_ = iVar188;
                            auVar1481._28_4_ = iVar188;
                            iVar188 = piVar222[9];
                            auVar1038._4_4_ = iVar188;
                            auVar1038._0_4_ = iVar188;
                            auVar1038._8_4_ = iVar188;
                            auVar1038._12_4_ = iVar188;
                            auVar1038._16_4_ = iVar188;
                            auVar1038._20_4_ = iVar188;
                            auVar1038._24_4_ = iVar188;
                            auVar1038._28_4_ = iVar188;
                            iVar188 = piVar222[10];
                            auVar982._4_4_ = iVar188;
                            auVar982._0_4_ = iVar188;
                            auVar982._8_4_ = iVar188;
                            auVar982._12_4_ = iVar188;
                            auVar982._16_4_ = iVar188;
                            auVar982._20_4_ = iVar188;
                            auVar982._24_4_ = iVar188;
                            auVar982._28_4_ = iVar188;
                            iVar188 = piVar222[0xb];
                            auVar1423._4_4_ = iVar188;
                            auVar1423._0_4_ = iVar188;
                            auVar1423._8_4_ = iVar188;
                            auVar1423._12_4_ = iVar188;
                            auVar1423._16_4_ = iVar188;
                            auVar1423._20_4_ = iVar188;
                            auVar1423._24_4_ = iVar188;
                            auVar1423._28_4_ = iVar188;
                            iVar188 = piVar222[0xc];
                            auVar1345._4_4_ = iVar188;
                            auVar1345._0_4_ = iVar188;
                            auVar1345._8_4_ = iVar188;
                            auVar1345._12_4_ = iVar188;
                            auVar1345._16_4_ = iVar188;
                            auVar1345._20_4_ = iVar188;
                            auVar1345._24_4_ = iVar188;
                            auVar1345._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar1481,auVar376);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1038,auVar1215);
                            iVar188 = piVar222[0xd];
                            auVar830._4_4_ = iVar188;
                            auVar830._0_4_ = iVar188;
                            auVar830._8_4_ = iVar188;
                            auVar830._12_4_ = iVar188;
                            auVar830._16_4_ = iVar188;
                            auVar830._20_4_ = iVar188;
                            auVar830._24_4_ = iVar188;
                            auVar830._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar982,auVar1449);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1423,auVar1485);
                            iVar188 = piVar222[0xe];
                            auVar914._4_4_ = iVar188;
                            auVar914._0_4_ = iVar188;
                            auVar914._8_4_ = iVar188;
                            auVar914._12_4_ = iVar188;
                            auVar914._16_4_ = iVar188;
                            auVar914._20_4_ = iVar188;
                            auVar914._24_4_ = iVar188;
                            auVar914._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1345,auVar613);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar830,auVar593);
                            iVar188 = piVar222[0xf];
                            auVar570._4_4_ = iVar188;
                            auVar570._0_4_ = iVar188;
                            auVar570._8_4_ = iVar188;
                            auVar570._12_4_ = iVar188;
                            auVar570._16_4_ = iVar188;
                            auVar570._20_4_ = iVar188;
                            auVar570._24_4_ = iVar188;
                            auVar570._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar914,auVar304);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar570,auVar594);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x300);
                            auVar945 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar1481);
                            iVar188 = piVar222[0x10];
                            auVar1108._4_4_ = iVar188;
                            auVar1108._0_4_ = iVar188;
                            auVar1108._8_4_ = iVar188;
                            auVar1108._12_4_ = iVar188;
                            auVar1108._16_4_ = iVar188;
                            auVar1108._20_4_ = iVar188;
                            auVar1108._24_4_ = iVar188;
                            auVar1108._28_4_ = iVar188;
                            auVar268 = vfmadd213ps_fma(auVar1108,auVar376,ZEXT1632(auVar310));
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 800);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar945),auVar376,auVar1038);
                            iVar188 = piVar222[0x11];
                            auVar463._4_4_ = iVar188;
                            auVar463._0_4_ = iVar188;
                            auVar463._8_4_ = iVar188;
                            auVar463._12_4_ = iVar188;
                            auVar463._16_4_ = iVar188;
                            auVar463._20_4_ = iVar188;
                            auVar463._24_4_ = iVar188;
                            auVar463._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar463);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x340);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar982);
                            iVar188 = piVar222[0x12];
                            auVar464._4_4_ = iVar188;
                            auVar464._0_4_ = iVar188;
                            auVar464._8_4_ = iVar188;
                            auVar464._12_4_ = iVar188;
                            auVar464._16_4_ = iVar188;
                            auVar464._20_4_ = iVar188;
                            auVar464._24_4_ = iVar188;
                            auVar464._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar464);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x360);
                            iVar188 = piVar222[0x13];
                            auVar465._4_4_ = iVar188;
                            auVar465._0_4_ = iVar188;
                            auVar465._8_4_ = iVar188;
                            auVar465._12_4_ = iVar188;
                            auVar465._16_4_ = iVar188;
                            auVar465._20_4_ = iVar188;
                            auVar465._24_4_ = iVar188;
                            auVar465._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar1423);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar465);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x380);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar1345);
                            iVar188 = piVar222[0x14];
                            auVar466._4_4_ = iVar188;
                            auVar466._0_4_ = iVar188;
                            auVar466._8_4_ = iVar188;
                            auVar466._12_4_ = iVar188;
                            auVar466._16_4_ = iVar188;
                            auVar466._20_4_ = iVar188;
                            auVar466._24_4_ = iVar188;
                            auVar466._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar466);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3a0);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar830);
                            iVar188 = piVar222[0x15];
                            auVar467._4_4_ = iVar188;
                            auVar467._0_4_ = iVar188;
                            auVar467._8_4_ = iVar188;
                            auVar467._12_4_ = iVar188;
                            auVar467._16_4_ = iVar188;
                            auVar467._20_4_ = iVar188;
                            auVar467._24_4_ = iVar188;
                            auVar467._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar467);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3c0);
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar914);
                            iVar188 = piVar222[0x16];
                            auVar468._4_4_ = iVar188;
                            auVar468._0_4_ = iVar188;
                            auVar468._8_4_ = iVar188;
                            auVar468._12_4_ = iVar188;
                            auVar468._16_4_ = iVar188;
                            auVar468._20_4_ = iVar188;
                            auVar468._24_4_ = iVar188;
                            auVar468._28_4_ = iVar188;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar468);
                            auVar376 = *(undefined1 (*) [32])
                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3e0);
                            iVar188 = piVar222[0x17];
                            auVar469._4_4_ = iVar188;
                            auVar469._0_4_ = iVar188;
                            auVar469._8_4_ = iVar188;
                            auVar469._12_4_ = iVar188;
                            auVar469._16_4_ = iVar188;
                            auVar469._20_4_ = iVar188;
                            auVar469._24_4_ = iVar188;
                            auVar469._28_4_ = iVar188;
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar376,auVar570);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar376,auVar469);
                            *pauVar236 = ZEXT1632(auVar310);
                            pauVar236[1] = ZEXT1632(auVar268);
                            piVar255 = piVar255 + 0x10;
                            piVar222 = piVar222 + 0x10;
                            pauVar236 = pauVar236 + 2;
                            piVar223 = piVar223 + 0x10;
                            piVar227 = piVar227 + 0x10;
                          }
                          for (; iVar257 < iVar187; iVar257 = iVar257 + 1) {
                            iVar188 = piVar223[-8];
                            auVar300._4_4_ = iVar188;
                            auVar300._0_4_ = iVar188;
                            auVar300._8_4_ = iVar188;
                            auVar300._12_4_ = iVar188;
                            auVar300._16_4_ = iVar188;
                            auVar300._20_4_ = iVar188;
                            auVar300._24_4_ = iVar188;
                            auVar300._28_4_ = iVar188;
                            iVar188 = piVar223[-7];
                            auVar378._4_4_ = iVar188;
                            auVar378._0_4_ = iVar188;
                            auVar378._8_4_ = iVar188;
                            auVar378._12_4_ = iVar188;
                            auVar378._16_4_ = iVar188;
                            auVar378._20_4_ = iVar188;
                            auVar378._24_4_ = iVar188;
                            auVar378._28_4_ = iVar188;
                            iVar188 = piVar223[-6];
                            auVar470._4_4_ = iVar188;
                            auVar470._0_4_ = iVar188;
                            auVar470._8_4_ = iVar188;
                            auVar470._12_4_ = iVar188;
                            auVar470._16_4_ = iVar188;
                            auVar470._20_4_ = iVar188;
                            auVar470._24_4_ = iVar188;
                            auVar470._28_4_ = iVar188;
                            iVar188 = piVar223[-5];
                            auVar571._4_4_ = iVar188;
                            auVar571._0_4_ = iVar188;
                            auVar571._8_4_ = iVar188;
                            auVar571._12_4_ = iVar188;
                            auVar571._16_4_ = iVar188;
                            auVar571._20_4_ = iVar188;
                            auVar571._24_4_ = iVar188;
                            auVar571._28_4_ = iVar188;
                            iVar188 = piVar223[-4];
                            auVar714._4_4_ = iVar188;
                            auVar714._0_4_ = iVar188;
                            auVar714._8_4_ = iVar188;
                            auVar714._12_4_ = iVar188;
                            auVar714._16_4_ = iVar188;
                            auVar714._20_4_ = iVar188;
                            auVar714._24_4_ = iVar188;
                            auVar714._28_4_ = iVar188;
                            iVar188 = piVar223[-3];
                            auVar831._4_4_ = iVar188;
                            auVar831._0_4_ = iVar188;
                            auVar831._8_4_ = iVar188;
                            auVar831._12_4_ = iVar188;
                            auVar831._16_4_ = iVar188;
                            auVar831._20_4_ = iVar188;
                            auVar831._24_4_ = iVar188;
                            auVar831._28_4_ = iVar188;
                            iVar188 = piVar223[-2];
                            auVar915._4_4_ = iVar188;
                            auVar915._0_4_ = iVar188;
                            auVar915._8_4_ = iVar188;
                            auVar915._12_4_ = iVar188;
                            auVar915._16_4_ = iVar188;
                            auVar915._20_4_ = iVar188;
                            auVar915._24_4_ = iVar188;
                            auVar915._28_4_ = iVar188;
                            iVar188 = piVar223[-1];
                            auVar983._4_4_ = iVar188;
                            auVar983._0_4_ = iVar188;
                            auVar983._8_4_ = iVar188;
                            auVar983._12_4_ = iVar188;
                            auVar983._16_4_ = iVar188;
                            auVar983._20_4_ = iVar188;
                            auVar983._24_4_ = iVar188;
                            auVar983._28_4_ = iVar188;
                            auVar268 = vfmadd213ps_fma(*(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208),
                                                       auVar300,*pauVar236);
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar378,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x20))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar470,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x40))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar571,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x60))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar714,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x80))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar831,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0xa0))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar915,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0xc0))
                            ;
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar983,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0xe0))
                            ;
                            iVar188 = *piVar223;
                            auVar301._4_4_ = iVar188;
                            auVar301._0_4_ = iVar188;
                            auVar301._8_4_ = iVar188;
                            auVar301._12_4_ = iVar188;
                            auVar301._16_4_ = iVar188;
                            auVar301._20_4_ = iVar188;
                            auVar301._24_4_ = iVar188;
                            auVar301._28_4_ = iVar188;
                            iVar188 = piVar223[1];
                            auVar379._4_4_ = iVar188;
                            auVar379._0_4_ = iVar188;
                            auVar379._8_4_ = iVar188;
                            auVar379._12_4_ = iVar188;
                            auVar379._16_4_ = iVar188;
                            auVar379._20_4_ = iVar188;
                            auVar379._24_4_ = iVar188;
                            auVar379._28_4_ = iVar188;
                            iVar188 = piVar223[2];
                            auVar471._4_4_ = iVar188;
                            auVar471._0_4_ = iVar188;
                            auVar471._8_4_ = iVar188;
                            auVar471._12_4_ = iVar188;
                            auVar471._16_4_ = iVar188;
                            auVar471._20_4_ = iVar188;
                            auVar471._24_4_ = iVar188;
                            auVar471._28_4_ = iVar188;
                            iVar188 = piVar223[3];
                            auVar572._4_4_ = iVar188;
                            auVar572._0_4_ = iVar188;
                            auVar572._8_4_ = iVar188;
                            auVar572._12_4_ = iVar188;
                            auVar572._16_4_ = iVar188;
                            auVar572._20_4_ = iVar188;
                            auVar572._24_4_ = iVar188;
                            auVar572._28_4_ = iVar188;
                            iVar188 = piVar223[4];
                            auVar715._4_4_ = iVar188;
                            auVar715._0_4_ = iVar188;
                            auVar715._8_4_ = iVar188;
                            auVar715._12_4_ = iVar188;
                            auVar715._16_4_ = iVar188;
                            auVar715._20_4_ = iVar188;
                            auVar715._24_4_ = iVar188;
                            auVar715._28_4_ = iVar188;
                            iVar188 = piVar223[5];
                            auVar832._4_4_ = iVar188;
                            auVar832._0_4_ = iVar188;
                            auVar832._8_4_ = iVar188;
                            auVar832._12_4_ = iVar188;
                            auVar832._16_4_ = iVar188;
                            auVar832._20_4_ = iVar188;
                            auVar832._24_4_ = iVar188;
                            auVar832._28_4_ = iVar188;
                            iVar188 = piVar223[6];
                            auVar916._4_4_ = iVar188;
                            auVar916._0_4_ = iVar188;
                            auVar916._8_4_ = iVar188;
                            auVar916._12_4_ = iVar188;
                            auVar916._16_4_ = iVar188;
                            auVar916._20_4_ = iVar188;
                            auVar916._24_4_ = iVar188;
                            auVar916._28_4_ = iVar188;
                            iVar188 = piVar223[7];
                            auVar984._4_4_ = iVar188;
                            auVar984._0_4_ = iVar188;
                            auVar984._8_4_ = iVar188;
                            auVar984._12_4_ = iVar188;
                            auVar984._16_4_ = iVar188;
                            auVar984._20_4_ = iVar188;
                            auVar984._24_4_ = iVar188;
                            auVar984._28_4_ = iVar188;
                            auVar268 = vfmadd132ps_fma(auVar301,ZEXT1632(auVar268),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x100)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar379,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x120)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar471,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x140)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar572,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x160)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar715,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x180)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar832,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1a0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar916,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1c0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar984,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x1e0)
                                                      );
                            iVar188 = piVar227[-8];
                            auVar380._4_4_ = iVar188;
                            auVar380._0_4_ = iVar188;
                            auVar380._8_4_ = iVar188;
                            auVar380._12_4_ = iVar188;
                            auVar380._16_4_ = iVar188;
                            auVar380._20_4_ = iVar188;
                            auVar380._24_4_ = iVar188;
                            auVar380._28_4_ = iVar188;
                            iVar188 = piVar227[-7];
                            auVar472._4_4_ = iVar188;
                            auVar472._0_4_ = iVar188;
                            auVar472._8_4_ = iVar188;
                            auVar472._12_4_ = iVar188;
                            auVar472._16_4_ = iVar188;
                            auVar472._20_4_ = iVar188;
                            auVar472._24_4_ = iVar188;
                            auVar472._28_4_ = iVar188;
                            iVar188 = piVar227[-6];
                            auVar573._4_4_ = iVar188;
                            auVar573._0_4_ = iVar188;
                            auVar573._8_4_ = iVar188;
                            auVar573._12_4_ = iVar188;
                            auVar573._16_4_ = iVar188;
                            auVar573._20_4_ = iVar188;
                            auVar573._24_4_ = iVar188;
                            auVar573._28_4_ = iVar188;
                            iVar188 = piVar227[-5];
                            auVar716._4_4_ = iVar188;
                            auVar716._0_4_ = iVar188;
                            auVar716._8_4_ = iVar188;
                            auVar716._12_4_ = iVar188;
                            auVar716._16_4_ = iVar188;
                            auVar716._20_4_ = iVar188;
                            auVar716._24_4_ = iVar188;
                            auVar716._28_4_ = iVar188;
                            iVar188 = piVar227[-4];
                            auVar833._4_4_ = iVar188;
                            auVar833._0_4_ = iVar188;
                            auVar833._8_4_ = iVar188;
                            auVar833._12_4_ = iVar188;
                            auVar833._16_4_ = iVar188;
                            auVar833._20_4_ = iVar188;
                            auVar833._24_4_ = iVar188;
                            auVar833._28_4_ = iVar188;
                            iVar188 = piVar227[-3];
                            auVar917._4_4_ = iVar188;
                            auVar917._0_4_ = iVar188;
                            auVar917._8_4_ = iVar188;
                            auVar917._12_4_ = iVar188;
                            auVar917._16_4_ = iVar188;
                            auVar917._20_4_ = iVar188;
                            auVar917._24_4_ = iVar188;
                            auVar917._28_4_ = iVar188;
                            iVar188 = piVar227[-2];
                            auVar985._4_4_ = iVar188;
                            auVar985._0_4_ = iVar188;
                            auVar985._8_4_ = iVar188;
                            auVar985._12_4_ = iVar188;
                            auVar985._16_4_ = iVar188;
                            auVar985._20_4_ = iVar188;
                            auVar985._24_4_ = iVar188;
                            auVar985._28_4_ = iVar188;
                            iVar188 = piVar227[-1];
                            auVar1039._4_4_ = iVar188;
                            auVar1039._0_4_ = iVar188;
                            auVar1039._8_4_ = iVar188;
                            auVar1039._12_4_ = iVar188;
                            auVar1039._16_4_ = iVar188;
                            auVar1039._20_4_ = iVar188;
                            auVar1039._24_4_ = iVar188;
                            auVar1039._28_4_ = iVar188;
                            auVar268 = vfmadd132ps_fma(auVar380,ZEXT1632(auVar268),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x200)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar472,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x220)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar573,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x240)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar716,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x260)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar833,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x280)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar917,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2a0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar985,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2c0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1039,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x2e0)
                                                      );
                            iVar188 = *piVar227;
                            auVar302._4_4_ = iVar188;
                            auVar302._0_4_ = iVar188;
                            auVar302._8_4_ = iVar188;
                            auVar302._12_4_ = iVar188;
                            auVar302._16_4_ = iVar188;
                            auVar302._20_4_ = iVar188;
                            auVar302._24_4_ = iVar188;
                            auVar302._28_4_ = iVar188;
                            iVar188 = piVar227[1];
                            auVar473._4_4_ = iVar188;
                            auVar473._0_4_ = iVar188;
                            auVar473._8_4_ = iVar188;
                            auVar473._12_4_ = iVar188;
                            auVar473._16_4_ = iVar188;
                            auVar473._20_4_ = iVar188;
                            auVar473._24_4_ = iVar188;
                            auVar473._28_4_ = iVar188;
                            iVar188 = piVar227[2];
                            auVar574._4_4_ = iVar188;
                            auVar574._0_4_ = iVar188;
                            auVar574._8_4_ = iVar188;
                            auVar574._12_4_ = iVar188;
                            auVar574._16_4_ = iVar188;
                            auVar574._20_4_ = iVar188;
                            auVar574._24_4_ = iVar188;
                            auVar574._28_4_ = iVar188;
                            iVar188 = piVar227[3];
                            auVar717._4_4_ = iVar188;
                            auVar717._0_4_ = iVar188;
                            auVar717._8_4_ = iVar188;
                            auVar717._12_4_ = iVar188;
                            auVar717._16_4_ = iVar188;
                            auVar717._20_4_ = iVar188;
                            auVar717._24_4_ = iVar188;
                            auVar717._28_4_ = iVar188;
                            iVar188 = piVar227[4];
                            auVar834._4_4_ = iVar188;
                            auVar834._0_4_ = iVar188;
                            auVar834._8_4_ = iVar188;
                            auVar834._12_4_ = iVar188;
                            auVar834._16_4_ = iVar188;
                            auVar834._20_4_ = iVar188;
                            auVar834._24_4_ = iVar188;
                            auVar834._28_4_ = iVar188;
                            iVar188 = piVar227[5];
                            auVar918._4_4_ = iVar188;
                            auVar918._0_4_ = iVar188;
                            auVar918._8_4_ = iVar188;
                            auVar918._12_4_ = iVar188;
                            auVar918._16_4_ = iVar188;
                            auVar918._20_4_ = iVar188;
                            auVar918._24_4_ = iVar188;
                            auVar918._28_4_ = iVar188;
                            iVar188 = piVar227[6];
                            auVar986._4_4_ = iVar188;
                            auVar986._0_4_ = iVar188;
                            auVar986._8_4_ = iVar188;
                            auVar986._12_4_ = iVar188;
                            auVar986._16_4_ = iVar188;
                            auVar986._20_4_ = iVar188;
                            auVar986._24_4_ = iVar188;
                            auVar986._28_4_ = iVar188;
                            iVar188 = piVar227[7];
                            auVar1040._4_4_ = iVar188;
                            auVar1040._0_4_ = iVar188;
                            auVar1040._8_4_ = iVar188;
                            auVar1040._12_4_ = iVar188;
                            auVar1040._16_4_ = iVar188;
                            auVar1040._20_4_ = iVar188;
                            auVar1040._24_4_ = iVar188;
                            auVar1040._28_4_ = iVar188;
                            auVar268 = vfmadd132ps_fma(auVar302,ZEXT1632(auVar268),
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x300)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar473,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 800));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar574,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x340)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar717,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x360)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar834,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x380)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar918,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3a0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar986,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3c0)
                                                      );
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1040,
                                                       *(undefined1 (*) [32])
                                                        ((long)pvVar251 + lVar200 + lVar208 + 0x3e0)
                                                      );
                            *pauVar236 = ZEXT1632(auVar268);
                            pauVar236 = pauVar236 + 1;
                            piVar223 = piVar223 + 8;
                            piVar227 = piVar227 + 8;
                          }
                          piVar255 = piVar223;
                          piVar222 = piVar227;
                        }
                      }
                    }
LAB_001c197f:
                    pLVar233 = this->activation;
                  }
LAB_001c686b:
                  if (pLVar233 != (Layer *)0x0) {
                    (*pLVar233->_vptr_Layer[9])(pLVar233,top_blob,opt);
                  }
                }
                else {
                  bVar186 = iVar239 == 1;
                  if ((bVar186) && (iVar258 == 8)) {
                    auVar268 = vpcmpeqd_avx(auVar945,_DAT_005352c0);
                    uVar244 = vmovmskps_avx(auVar268);
                    if (iVar257 == 1 && (iVar249 == 1 && (uVar244 ^ 0xf) == 0)) {
                      iVar187 = top_blob->c;
                      uVar244 = 0;
                      uVar259 = top_blob->h;
                      if (top_blob->h < 1) {
                        uVar259 = uVar244;
                      }
                      uVar247 = local_920.c;
                      if (local_920.c < 1) {
                        uVar247 = uVar244;
                      }
                      iVar257 = top_blob->w;
                      uVar250 = iVar187 >> 1;
                      if (iVar187 >> 1 < 1) {
                        uVar250 = uVar244;
                      }
                      pvVar204 = (this->super_Convolution).bias_data.data;
                      for (uVar210 = 0; uVar210 != uVar250; uVar210 = uVar210 + 1) {
                        uVar196 = (long)top_blob->h * (long)top_blob->w;
                        uVar209 = top_blob->elemsize;
                        uVar229 = (uVar209 * uVar196 + 0xf & 0xfffffffffffffff0) / uVar209;
                        if (top_blob->dims == 4) {
                          uVar229 = uVar196;
                        }
                        lVar200 = uVar210 * 2 + 1;
                        if (pvVar204 == (void *)0x0) {
                          auVar376 = SUB6432(ZEXT864(0),0) << 0x40;
                          uVar306 = 0;
                          uVar266 = 0;
                          uVar307 = 0;
                          uVar308 = 0;
                        }
                        else {
                          auVar376 = *(undefined1 (*) [32])((long)pvVar204 + uVar210 * 0x40);
                          puVar224 = (undefined8 *)((long)pvVar204 + lVar200 * 0x20);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                          uVar307 = puVar224[2];
                          uVar308 = puVar224[3];
                        }
                        lVar208 = uVar209 * top_blob->cstep;
                        pauVar253 = (undefined1 (*) [32])
                                    (lVar208 * uVar210 * 2 + (long)top_blob->data);
                        puVar224 = (undefined8 *)(lVar208 * lVar200 + (long)top_blob->data);
                        iVar239 = (int)uVar229 * top_blob->d;
                        pauVar236 = pauVar253;
                        iVar188 = iVar239;
                        if (iVar239 < 1) {
                          iVar239 = 0;
                          iVar188 = iVar239;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, puVar214 = puVar224,
                              bVar186) {
                          *pauVar236 = auVar376;
                          pauVar236 = pauVar236 + 1;
                        }
                        while (bVar186 = iVar188 != 0, iVar188 = iVar188 + -1, bVar186) {
                          *puVar214 = uVar266;
                          puVar214[1] = uVar306;
                          puVar214[2] = uVar307;
                          puVar214[3] = uVar308;
                          puVar214 = puVar214 + 4;
                        }
                        pvVar251 = (this->weight_data_tm).data;
                        lVar208 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                        pauVar245 = (undefined1 (*) [32])(uVar210 * 2 * lVar208 + (long)pvVar251);
                        pauVar236 = (undefined1 (*) [32])(lVar208 * lVar200 + (long)pvVar251);
                        for (uVar209 = 0; uVar209 != uVar247; uVar209 = uVar209 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar209 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar200 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          uStack_a78 = *(undefined8 *)(*pauVar245 + 8);
                          uStack_a70 = *(undefined8 *)(*pauVar245 + 0x10);
                          uStack_a68 = *(undefined8 *)(*pauVar245 + 0x18);
                          auVar1482 = *pauVar245;
                          auVar142 = *pauVar245;
                          auVar66 = *pauVar245;
                          auVar1116 = *pauVar245;
                          auVar376 = *pauVar245;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar245;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar245 >> 0x20);
                          pauVar195 = pauVar245 + 1;
                          auVar161 = *(undefined1 (*) [12])*pauVar195;
                          auVar158 = *(undefined1 (*) [12])*pauVar195;
                          auVar155 = *(undefined1 (*) [12])*pauVar195;
                          auVar152 = *(undefined1 (*) [12])*pauVar195;
                          auVar151 = *(undefined1 (*) [12])*pauVar195;
                          auVar146 = *(undefined1 (*) [12])*pauVar195;
                          uStack_b74 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[1] + 8) >> 0x20);
                          uStack_b70 = (undefined4)*(undefined8 *)(pauVar245[1] + 0x10);
                          uStack_b6c = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[1] + 0x10) >> 0x20);
                          uStack_b68 = (undefined4)*(undefined8 *)(pauVar245[1] + 0x18);
                          uStack_b64 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[1] + 0x18) >> 0x20);
                          pauVar195 = pauVar245 + 2;
                          uStack_a18 = *(undefined8 *)(pauVar245[2] + 8);
                          uStack_a10 = *(undefined8 *)(pauVar245[2] + 0x10);
                          uStack_a08 = *(undefined8 *)(pauVar245[2] + 0x18);
                          auVar1501 = *pauVar195;
                          auVar1183 = *pauVar195;
                          auVar143 = *pauVar195;
                          auVar104 = *pauVar195;
                          auVar1215 = *pauVar195;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar195;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar245 + 3;
                          auVar162 = *(undefined1 (*) [12])*pauVar195;
                          auVar159 = *(undefined1 (*) [12])*pauVar195;
                          auVar156 = *(undefined1 (*) [12])*pauVar195;
                          auVar153 = *(undefined1 (*) [12])*pauVar195;
                          auVar149 = *(undefined1 (*) [12])*pauVar195;
                          auVar147 = *(undefined1 (*) [12])*pauVar195;
                          uStack_b34 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[3] + 8) >> 0x20);
                          uStack_b30 = (undefined4)*(undefined8 *)(pauVar245[3] + 0x10);
                          uStack_b2c = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[3] + 0x10) >> 0x20);
                          uStack_b28 = (undefined4)*(undefined8 *)(pauVar245[3] + 0x18);
                          uStack_b24 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[3] + 0x18) >> 0x20);
                          local_a00 = pauVar245[4];
                          pauVar195 = pauVar245 + 5;
                          auVar163 = *(undefined1 (*) [12])*pauVar195;
                          auVar160 = *(undefined1 (*) [12])*pauVar195;
                          auVar157 = *(undefined1 (*) [12])*pauVar195;
                          auVar154 = *(undefined1 (*) [12])*pauVar195;
                          auVar150 = *(undefined1 (*) [12])*pauVar195;
                          auVar148 = *(undefined1 (*) [12])*pauVar195;
                          uStack_ad4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[5] + 8) >> 0x20);
                          uStack_ad0 = (undefined4)*(undefined8 *)(pauVar245[5] + 0x10);
                          uStack_acc = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[5] + 0x10) >> 0x20);
                          uStack_ac8 = (undefined4)*(undefined8 *)(pauVar245[5] + 0x18);
                          uStack_ac4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar245[5] + 0x18) >> 0x20);
                          pauVar195 = pauVar245 + 6;
                          auVar106 = *pauVar195;
                          auVar1346 = *pauVar195;
                          auVar484 = *pauVar195;
                          auVar105 = *pauVar195;
                          auVar595 = *pauVar195;
                          auVar1485 = *pauVar195;
                          _local_9c0 = pauVar245[7];
                          pauVar195 = pauVar245 + 8;
                          uStack_a38 = *(undefined8 *)(pauVar245[8] + 8);
                          uStack_a30 = *(undefined8 *)(pauVar245[8] + 0x10);
                          uStack_a28 = *(undefined8 *)(pauVar245[8] + 0x18);
                          auVar485 = *pauVar195;
                          auVar1425 = *pauVar195;
                          auVar1109 = *pauVar195;
                          auVar64 = *pauVar195;
                          auVar1114 = *pauVar195;
                          auVar304 = *pauVar195;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar195;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          uStack_758 = *(undefined8 *)(*pauVar236 + 8);
                          uStack_750 = *(undefined8 *)(*pauVar236 + 0x10);
                          uStack_748 = *(undefined8 *)(*pauVar236 + 0x18);
                          auVar1500 = *pauVar236;
                          auVar381 = *pauVar236;
                          auVar1117 = *pauVar236;
                          auVar1449 = *pauVar236;
                          local_760 = (int)*(undefined8 *)*pauVar236;
                          iStack_75c = (int)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          local_880 = pauVar236[1];
                          local_9a0 = pauVar236[2];
                          local_960 = pauVar236[3];
                          local_980 = pauVar236[4];
                          pauVar195 = pauVar236 + 5;
                          uStack_778 = *(undefined8 *)(pauVar236[5] + 8);
                          uStack_770 = *(undefined8 *)(pauVar236[5] + 0x10);
                          uStack_768 = *(undefined8 *)(pauVar236[5] + 0x18);
                          auVar67 = *pauVar195;
                          auVar742 = *pauVar195;
                          auVar1112 = *pauVar195;
                          auVar613 = *pauVar195;
                          local_780._0_4_ = (int)*(undefined8 *)*pauVar195;
                          local_780._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar236 + 6;
                          uStack_a58 = *(undefined8 *)(pauVar236[6] + 8);
                          uStack_a50 = *(undefined8 *)(pauVar236[6] + 0x10);
                          uStack_a48 = *(undefined8 *)(pauVar236[6] + 0x18);
                          auVar144 = *pauVar195;
                          auVar1424 = *pauVar195;
                          auVar856 = *pauVar195;
                          auVar1118 = *pauVar195;
                          auVar1113 = *pauVar195;
                          auVar593 = *pauVar195;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar195;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar236 + 7;
                          uStack_838 = *(undefined8 *)(pauVar236[7] + 8);
                          uStack_830 = *(undefined8 *)(pauVar236[7] + 0x10);
                          uStack_828 = *(undefined8 *)(pauVar236[7] + 0x18);
                          auVar382 = *pauVar195;
                          auVar1182 = *pauVar195;
                          auVar65 = *pauVar195;
                          auVar1115 = *pauVar195;
                          auVar594 = *pauVar195;
                          local_840._0_4_ = (uint)*(undefined8 *)*pauVar195;
                          local_840._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          local_7c0 = pauVar236[8];
                          puVar214 = puVar224;
                          pauVar195 = pauVar253;
                          for (uVar244 = 0; uVar244 != uVar259; uVar244 = uVar244 + 1) {
                            lVar208 = 0;
                            pauVar212 = pauVar195;
                            puVar231 = puVar214;
                            for (iVar188 = 0; iVar188 + 3 < iVar257; iVar188 = iVar188 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar561._4_4_ = uVar211;
                              auVar561._0_4_ = uVar211;
                              auVar561._8_4_ = uVar211;
                              auVar561._12_4_ = uVar211;
                              auVar561._16_4_ = uVar211;
                              auVar561._20_4_ = uVar211;
                              auVar561._24_4_ = uVar211;
                              auVar561._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar976._4_4_ = uVar211;
                              auVar976._0_4_ = uVar211;
                              auVar976._8_4_ = uVar211;
                              auVar976._12_4_ = uVar211;
                              auVar976._16_4_ = uVar211;
                              auVar976._20_4_ = uVar211;
                              auVar976._24_4_ = uVar211;
                              auVar976._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar457._4_4_ = uVar211;
                              auVar457._0_4_ = uVar211;
                              auVar457._8_4_ = uVar211;
                              auVar457._12_4_ = uVar211;
                              auVar457._16_4_ = uVar211;
                              auVar457._20_4_ = uVar211;
                              auVar457._24_4_ = uVar211;
                              auVar457._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar909._4_4_ = uVar211;
                              auVar909._0_4_ = uVar211;
                              auVar909._8_4_ = uVar211;
                              auVar909._12_4_ = uVar211;
                              auVar909._16_4_ = uVar211;
                              auVar909._20_4_ = uVar211;
                              auVar909._24_4_ = uVar211;
                              auVar909._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar823._4_4_ = uVar211;
                              auVar823._0_4_ = uVar211;
                              auVar823._8_4_ = uVar211;
                              auVar823._12_4_ = uVar211;
                              auVar823._16_4_ = uVar211;
                              auVar823._20_4_ = uVar211;
                              auVar823._24_4_ = uVar211;
                              auVar823._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar1498._4_4_ = uVar211;
                              auVar1498._0_4_ = uVar211;
                              auVar1498._8_4_ = uVar211;
                              auVar1498._12_4_ = uVar211;
                              auVar1498._16_4_ = uVar211;
                              auVar1498._20_4_ = uVar211;
                              auVar1498._24_4_ = uVar211;
                              auVar1498._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar1032._4_4_ = uVar211;
                              auVar1032._0_4_ = uVar211;
                              auVar1032._8_4_ = uVar211;
                              auVar1032._12_4_ = uVar211;
                              auVar1032._16_4_ = uVar211;
                              auVar1032._20_4_ = uVar211;
                              auVar1032._24_4_ = uVar211;
                              auVar1032._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          ((long)*pauVar195 + lVar208 * 8),auVar561,
                                                         auVar376);
                              auVar45._12_4_ = uStack_b74;
                              auVar45._0_12_ = auVar146;
                              auVar45._16_4_ = uStack_b70;
                              auVar45._20_4_ = uStack_b6c;
                              auVar45._24_4_ = uStack_b68;
                              auVar45._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar976,auVar45);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar457,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar561,auVar1449,
                                                         *(undefined1 (*) [32])(puVar214 + lVar208))
                              ;
                              auVar86._12_4_ = uStack_b34;
                              auVar86._0_12_ = auVar147;
                              auVar86._16_4_ = uStack_b30;
                              auVar86._20_4_ = uStack_b2c;
                              auVar86._24_4_ = uStack_b28;
                              auVar86._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar909,auVar86);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar976,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar457,local_9a0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar909);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar910._4_4_ = uVar211;
                              auVar910._0_4_ = uVar211;
                              auVar910._8_4_ = uVar211;
                              auVar910._12_4_ = uVar211;
                              auVar910._16_4_ = uVar211;
                              auVar910._20_4_ = uVar211;
                              auVar910._24_4_ = uVar211;
                              auVar910._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar823,local_a00);
                              auVar124._12_4_ = uStack_ad4;
                              auVar124._0_12_ = auVar148;
                              auVar124._16_4_ = uStack_ad0;
                              auVar124._20_4_ = uStack_acc;
                              auVar124._24_4_ = uStack_ac8;
                              auVar124._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1498,auVar124);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1032,auVar1485);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar823,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1498,auVar613);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1032,auVar593);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar1033._4_4_ = uVar211;
                              auVar1033._0_4_ = uVar211;
                              auVar1033._8_4_ = uVar211;
                              auVar1033._12_4_ = uVar211;
                              auVar1033._16_4_ = uVar211;
                              auVar1033._20_4_ = uVar211;
                              auVar1033._24_4_ = uVar211;
                              auVar1033._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar910,_local_9c0);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1033,auVar304);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar910,auVar594);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1033,local_7c0);
                              *(undefined1 (*) [32])((long)*pauVar195 + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(puVar214 + lVar208) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar562._4_4_ = uVar211;
                              auVar562._0_4_ = uVar211;
                              auVar562._8_4_ = uVar211;
                              auVar562._12_4_ = uVar211;
                              auVar562._16_4_ = uVar211;
                              auVar562._20_4_ = uVar211;
                              auVar562._24_4_ = uVar211;
                              auVar562._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar195[1] + lVar208 * 8),auVar976,
                                                         auVar376);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar457,auVar45);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar562,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar976,auVar1449,
                                                         *(undefined1 (*) [32])
                                                          (puVar214 + lVar208 + 4));
                              auVar87._12_4_ = uStack_b34;
                              auVar87._0_12_ = auVar149;
                              auVar87._16_4_ = uStack_b30;
                              auVar87._20_4_ = uStack_b2c;
                              auVar87._24_4_ = uStack_b28;
                              auVar87._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar823,auVar87);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar457,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar562,local_9a0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar823);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar824._4_4_ = uVar211;
                              auVar824._0_4_ = uVar211;
                              auVar824._8_4_ = uVar211;
                              auVar824._12_4_ = uVar211;
                              auVar824._16_4_ = uVar211;
                              auVar824._20_4_ = uVar211;
                              auVar824._24_4_ = uVar211;
                              auVar824._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1498,local_a00);
                              auVar125._12_4_ = uStack_ad4;
                              auVar125._0_12_ = auVar150;
                              auVar125._16_4_ = uStack_ad0;
                              auVar125._20_4_ = uStack_acc;
                              auVar125._24_4_ = uStack_ac8;
                              auVar125._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar824,auVar125);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar910,auVar595);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1498,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar824,auVar1112);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar910,auVar1113);
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar911._4_4_ = uVar211;
                              auVar911._0_4_ = uVar211;
                              auVar911._8_4_ = uVar211;
                              auVar911._12_4_ = uVar211;
                              auVar911._16_4_ = uVar211;
                              auVar911._20_4_ = uVar211;
                              auVar911._24_4_ = uVar211;
                              auVar911._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1033,_local_9c0);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar911,auVar1114);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1033,auVar1115);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar911,local_7c0);
                              *(undefined1 (*) [32])(pauVar195[1] + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(puVar214 + lVar208 + 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                              auVar977._4_4_ = uVar211;
                              auVar977._0_4_ = uVar211;
                              auVar977._8_4_ = uVar211;
                              auVar977._12_4_ = uVar211;
                              auVar977._16_4_ = uVar211;
                              auVar977._20_4_ = uVar211;
                              auVar977._24_4_ = uVar211;
                              auVar977._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar195[2] + lVar208 * 8),auVar457,
                                                         auVar1116);
                              auVar46._12_4_ = uStack_b74;
                              auVar46._0_12_ = auVar151;
                              auVar46._16_4_ = uStack_b70;
                              auVar46._20_4_ = uStack_b6c;
                              auVar46._24_4_ = uStack_b68;
                              auVar46._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar562,auVar46);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar977,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar457,auVar1117,
                                                         *(undefined1 (*) [32])
                                                          (puVar214 + lVar208 + 8));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1498,auVar87);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar562,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar977,local_9a0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar1498);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                              auVar698._4_4_ = uVar211;
                              auVar698._0_4_ = uVar211;
                              auVar698._8_4_ = uVar211;
                              auVar698._12_4_ = uVar211;
                              auVar698._16_4_ = uVar211;
                              auVar698._20_4_ = uVar211;
                              auVar698._24_4_ = uVar211;
                              auVar698._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar824,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar698,auVar125);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1033,auVar595);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar824,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar698,auVar1112);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1118,auVar1033);
                              uVar211 = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                              auVar1034._4_4_ = uVar211;
                              auVar1034._0_4_ = uVar211;
                              auVar1034._8_4_ = uVar211;
                              auVar1034._12_4_ = uVar211;
                              auVar1034._16_4_ = uVar211;
                              auVar1034._20_4_ = uVar211;
                              auVar1034._24_4_ = uVar211;
                              auVar1034._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar911,_local_9c0);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1034,auVar64);
                              *(undefined1 (*) [32])(pauVar195[2] + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar911,auVar65);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1034,local_7c0);
                              *(undefined1 (*) [32])(puVar214 + lVar208 + 8) = ZEXT1632(auVar268);
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar195[3] + lVar208 * 8),auVar562,
                                                         auVar66);
                              auVar268 = vfmadd213ps_fma(auVar562,auVar1117,
                                                         *(undefined1 (*) [32])
                                                          (puVar214 + lVar208 + 0xc));
                              auVar47._12_4_ = uStack_b74;
                              auVar47._0_12_ = auVar152;
                              auVar47._16_4_ = uStack_b70;
                              auVar47._20_4_ = uStack_b6c;
                              auVar47._24_4_ = uStack_b68;
                              auVar47._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar977,auVar47);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar977,local_880);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                              auVar978._4_4_ = uVar211;
                              auVar978._0_4_ = uVar211;
                              auVar978._8_4_ = uVar211;
                              auVar978._12_4_ = uVar211;
                              auVar978._16_4_ = uVar211;
                              auVar978._20_4_ = uVar211;
                              auVar978._24_4_ = uVar211;
                              auVar978._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar978,auVar104);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_9a0,auVar978);
                              auVar88._12_4_ = uStack_b34;
                              auVar88._0_12_ = auVar153;
                              auVar88._16_4_ = uStack_b30;
                              auVar88._20_4_ = uStack_b2c;
                              auVar88._24_4_ = uStack_b28;
                              auVar88._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar824,auVar88);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar824,local_960);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar698,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar698);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                              auVar699._4_4_ = uVar211;
                              auVar699._0_4_ = uVar211;
                              auVar699._8_4_ = uVar211;
                              auVar699._12_4_ = uVar211;
                              auVar699._16_4_ = uVar211;
                              auVar699._20_4_ = uVar211;
                              auVar699._24_4_ = uVar211;
                              auVar699._28_4_ = uVar211;
                              auVar126._12_4_ = uStack_ad4;
                              auVar126._0_12_ = auVar154;
                              auVar126._16_4_ = uStack_ad0;
                              auVar126._20_4_ = uStack_acc;
                              auVar126._24_4_ = uStack_ac8;
                              auVar126._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar699,auVar126);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1112,auVar699);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar911,auVar105);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1118,auVar911);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1034,_local_9c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar65,auVar1034);
                              uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                              auVar700._4_4_ = uVar211;
                              auVar700._0_4_ = uVar211;
                              auVar700._8_4_ = uVar211;
                              auVar700._12_4_ = uVar211;
                              auVar700._16_4_ = uVar211;
                              auVar700._20_4_ = uVar211;
                              auVar700._24_4_ = uVar211;
                              auVar700._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar700,auVar64);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_7c0,auVar700);
                              *(undefined1 (*) [32])(pauVar195[3] + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(puVar214 + lVar208 + 0xc) = ZEXT1632(auVar268);
                              pauVar212 = pauVar212 + 4;
                              puVar231 = puVar231 + 0x10;
                              lVar208 = lVar208 + 0x10;
                            }
                            for (; iVar188 + 1 < iVar257; iVar188 = iVar188 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar1035._4_4_ = uVar211;
                              auVar1035._0_4_ = uVar211;
                              auVar1035._8_4_ = uVar211;
                              auVar1035._12_4_ = uVar211;
                              auVar1035._16_4_ = uVar211;
                              auVar1035._20_4_ = uVar211;
                              auVar1035._24_4_ = uVar211;
                              auVar1035._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar458._4_4_ = uVar211;
                              auVar458._0_4_ = uVar211;
                              auVar458._8_4_ = uVar211;
                              auVar458._12_4_ = uVar211;
                              auVar458._16_4_ = uVar211;
                              auVar458._20_4_ = uVar211;
                              auVar458._24_4_ = uVar211;
                              auVar458._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar825._4_4_ = uVar211;
                              auVar825._0_4_ = uVar211;
                              auVar825._8_4_ = uVar211;
                              auVar825._12_4_ = uVar211;
                              auVar825._16_4_ = uVar211;
                              auVar825._20_4_ = uVar211;
                              auVar825._24_4_ = uVar211;
                              auVar825._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar912._4_4_ = uVar211;
                              auVar912._0_4_ = uVar211;
                              auVar912._8_4_ = uVar211;
                              auVar912._12_4_ = uVar211;
                              auVar912._16_4_ = uVar211;
                              auVar912._20_4_ = uVar211;
                              auVar912._24_4_ = uVar211;
                              auVar912._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar701._4_4_ = uVar211;
                              auVar701._0_4_ = uVar211;
                              auVar701._8_4_ = uVar211;
                              auVar701._12_4_ = uVar211;
                              auVar701._16_4_ = uVar211;
                              auVar701._20_4_ = uVar211;
                              auVar701._24_4_ = uVar211;
                              auVar701._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar563._4_4_ = uVar211;
                              auVar563._0_4_ = uVar211;
                              auVar563._8_4_ = uVar211;
                              auVar563._12_4_ = uVar211;
                              auVar563._16_4_ = uVar211;
                              auVar563._20_4_ = uVar211;
                              auVar563._24_4_ = uVar211;
                              auVar563._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar979._4_4_ = uVar211;
                              auVar979._0_4_ = uVar211;
                              auVar979._8_4_ = uVar211;
                              auVar979._12_4_ = uVar211;
                              auVar979._16_4_ = uVar211;
                              auVar979._20_4_ = uVar211;
                              auVar979._24_4_ = uVar211;
                              auVar979._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          ((long)*pauVar195 + lVar208 * 8),auVar1035
                                                         ,auVar142);
                              auVar48._12_4_ = uStack_b74;
                              auVar48._0_12_ = auVar155;
                              auVar48._16_4_ = uStack_b70;
                              auVar48._20_4_ = uStack_b6c;
                              auVar48._24_4_ = uStack_b68;
                              auVar48._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar458,auVar48);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar825,auVar143);
                              auVar268 = vfmadd213ps_fma(auVar1035,auVar381,
                                                         *(undefined1 (*) [32])(puVar214 + lVar208))
                              ;
                              auVar89._12_4_ = uStack_b34;
                              auVar89._0_12_ = auVar156;
                              auVar89._16_4_ = uStack_b30;
                              auVar89._20_4_ = uStack_b2c;
                              auVar89._24_4_ = uStack_b28;
                              auVar89._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar912,auVar89);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar458,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar825,local_9a0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar912,local_960);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar913._4_4_ = uVar211;
                              auVar913._0_4_ = uVar211;
                              auVar913._8_4_ = uVar211;
                              auVar913._12_4_ = uVar211;
                              auVar913._16_4_ = uVar211;
                              auVar913._20_4_ = uVar211;
                              auVar913._24_4_ = uVar211;
                              auVar913._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar701,local_a00);
                              auVar127._12_4_ = uStack_ad4;
                              auVar127._0_12_ = auVar157;
                              auVar127._16_4_ = uStack_ad0;
                              auVar127._20_4_ = uStack_acc;
                              auVar127._24_4_ = uStack_ac8;
                              auVar127._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar563,auVar127);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar979,auVar484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar701,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar563,auVar742);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar979,auVar856);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar980._4_4_ = uVar211;
                              auVar980._0_4_ = uVar211;
                              auVar980._8_4_ = uVar211;
                              auVar980._12_4_ = uVar211;
                              auVar980._16_4_ = uVar211;
                              auVar980._20_4_ = uVar211;
                              auVar980._24_4_ = uVar211;
                              auVar980._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar913,_local_9c0);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar980,auVar1109);
                              *(undefined1 (*) [32])((long)*pauVar195 + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar913,auVar1182);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar980,local_7c0);
                              *(undefined1 (*) [32])(puVar214 + lVar208) = ZEXT1632(auVar268);
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar195[1] + lVar208 * 8),auVar458,
                                                         auVar142);
                              auVar268 = vfmadd213ps_fma(auVar458,auVar381,
                                                         *(undefined1 (*) [32])
                                                          (puVar214 + lVar208 + 4));
                              auVar49._12_4_ = uStack_b74;
                              auVar49._0_12_ = auVar158;
                              auVar49._16_4_ = uStack_b70;
                              auVar49._20_4_ = uStack_b6c;
                              auVar49._24_4_ = uStack_b68;
                              auVar49._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar825,auVar49);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar825);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar826._4_4_ = uVar211;
                              auVar826._0_4_ = uVar211;
                              auVar826._8_4_ = uVar211;
                              auVar826._12_4_ = uVar211;
                              auVar826._16_4_ = uVar211;
                              auVar826._20_4_ = uVar211;
                              auVar826._24_4_ = uVar211;
                              auVar826._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar826,auVar1183);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar826,local_9a0);
                              auVar90._12_4_ = uStack_b34;
                              auVar90._0_12_ = auVar159;
                              auVar90._16_4_ = uStack_b30;
                              auVar90._20_4_ = uStack_b2c;
                              auVar90._24_4_ = uStack_b28;
                              auVar90._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar701,auVar90);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar701,local_960);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar563,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar563);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar564._4_4_ = uVar211;
                              auVar564._0_4_ = uVar211;
                              auVar564._8_4_ = uVar211;
                              auVar564._12_4_ = uVar211;
                              auVar564._16_4_ = uVar211;
                              auVar564._20_4_ = uVar211;
                              auVar564._24_4_ = uVar211;
                              auVar564._28_4_ = uVar211;
                              auVar128._12_4_ = uStack_ad4;
                              auVar128._0_12_ = auVar160;
                              auVar128._16_4_ = uStack_ad0;
                              auVar128._20_4_ = uStack_acc;
                              auVar128._24_4_ = uStack_ac8;
                              auVar128._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar564,auVar128);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar742,auVar564);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar913,auVar1346);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar913,auVar1424);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar980,_local_9c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1182,auVar980);
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar565._4_4_ = uVar211;
                              auVar565._0_4_ = uVar211;
                              auVar565._8_4_ = uVar211;
                              auVar565._12_4_ = uVar211;
                              auVar565._16_4_ = uVar211;
                              auVar565._20_4_ = uVar211;
                              auVar565._24_4_ = uVar211;
                              auVar565._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar565,auVar1425);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_7c0,auVar565);
                              *(undefined1 (*) [32])(pauVar195[1] + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(puVar214 + lVar208 + 4) = ZEXT1632(auVar268);
                              pauVar212 = pauVar212 + 2;
                              puVar231 = puVar231 + 8;
                              lVar208 = lVar208 + 8;
                            }
                            for (; iVar188 < iVar257; iVar188 = iVar188 + 1) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar459._4_4_ = uVar211;
                              auVar459._0_4_ = uVar211;
                              auVar459._8_4_ = uVar211;
                              auVar459._12_4_ = uVar211;
                              auVar459._16_4_ = uVar211;
                              auVar459._20_4_ = uVar211;
                              auVar459._24_4_ = uVar211;
                              auVar459._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar702._4_4_ = uVar211;
                              auVar702._0_4_ = uVar211;
                              auVar702._8_4_ = uVar211;
                              auVar702._12_4_ = uVar211;
                              auVar702._16_4_ = uVar211;
                              auVar702._20_4_ = uVar211;
                              auVar702._24_4_ = uVar211;
                              auVar702._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          ((long)*pauVar195 + lVar208 * 8),auVar459,
                                                         auVar1482);
                              auVar268 = vfmadd213ps_fma(auVar459,auVar1500,
                                                         *(undefined1 (*) [32])(puVar214 + lVar208))
                              ;
                              auVar50._12_4_ = uStack_b74;
                              auVar50._0_12_ = auVar161;
                              auVar50._16_4_ = uStack_b70;
                              auVar50._20_4_ = uStack_b6c;
                              auVar50._24_4_ = uStack_b68;
                              auVar50._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar702,auVar50);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar702,local_880);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar703._4_4_ = uVar211;
                              auVar703._0_4_ = uVar211;
                              auVar703._8_4_ = uVar211;
                              auVar703._12_4_ = uVar211;
                              auVar703._16_4_ = uVar211;
                              auVar703._20_4_ = uVar211;
                              auVar703._24_4_ = uVar211;
                              auVar703._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar703,auVar1501);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar703,local_9a0);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar704._4_4_ = uVar211;
                              auVar704._0_4_ = uVar211;
                              auVar704._8_4_ = uVar211;
                              auVar704._12_4_ = uVar211;
                              auVar704._16_4_ = uVar211;
                              auVar704._20_4_ = uVar211;
                              auVar704._24_4_ = uVar211;
                              auVar704._28_4_ = uVar211;
                              auVar91._12_4_ = uStack_b34;
                              auVar91._0_12_ = auVar162;
                              auVar91._16_4_ = uStack_b30;
                              auVar91._20_4_ = uStack_b2c;
                              auVar91._24_4_ = uStack_b28;
                              auVar91._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar704,auVar91);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar704,local_960);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar705._4_4_ = uVar211;
                              auVar705._0_4_ = uVar211;
                              auVar705._8_4_ = uVar211;
                              auVar705._12_4_ = uVar211;
                              auVar705._16_4_ = uVar211;
                              auVar705._20_4_ = uVar211;
                              auVar705._24_4_ = uVar211;
                              auVar705._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar705,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar705,local_980);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar706._4_4_ = uVar211;
                              auVar706._0_4_ = uVar211;
                              auVar706._8_4_ = uVar211;
                              auVar706._12_4_ = uVar211;
                              auVar706._16_4_ = uVar211;
                              auVar706._20_4_ = uVar211;
                              auVar706._24_4_ = uVar211;
                              auVar706._28_4_ = uVar211;
                              auVar129._12_4_ = uStack_ad4;
                              auVar129._0_12_ = auVar163;
                              auVar129._16_4_ = uStack_ad0;
                              auVar129._20_4_ = uStack_acc;
                              auVar129._24_4_ = uStack_ac8;
                              auVar129._28_4_ = uStack_ac4;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar706,auVar129);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar706,auVar67);
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar707._4_4_ = uVar211;
                              auVar707._0_4_ = uVar211;
                              auVar707._8_4_ = uVar211;
                              auVar707._12_4_ = uVar211;
                              auVar707._16_4_ = uVar211;
                              auVar707._20_4_ = uVar211;
                              auVar707._24_4_ = uVar211;
                              auVar707._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar707,auVar106);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar707,auVar144);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar708._4_4_ = uVar211;
                              auVar708._0_4_ = uVar211;
                              auVar708._8_4_ = uVar211;
                              auVar708._12_4_ = uVar211;
                              auVar708._16_4_ = uVar211;
                              auVar708._20_4_ = uVar211;
                              auVar708._24_4_ = uVar211;
                              auVar708._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar708,_local_9c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar708,auVar382);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar709._4_4_ = uVar211;
                              auVar709._0_4_ = uVar211;
                              auVar709._8_4_ = uVar211;
                              auVar709._12_4_ = uVar211;
                              auVar709._16_4_ = uVar211;
                              auVar709._20_4_ = uVar211;
                              auVar709._24_4_ = uVar211;
                              auVar709._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar709,auVar485);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar709,local_7c0);
                              *(undefined1 (*) [32])((long)*pauVar195 + lVar208 * 8) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(puVar214 + lVar208) = ZEXT1632(auVar268);
                              pauVar212 = pauVar212 + 1;
                              puVar231 = puVar231 + 4;
                              lVar208 = lVar208 + 4;
                            }
                            piVar222 = (int *)((long)piVar222 + lVar208 + 8);
                            piVar255 = (int *)((long)piVar255 + lVar208 + 8);
                            lVar200 = lVar200 + lVar208 + 8;
                            puVar214 = puVar231;
                            pauVar195 = pauVar212;
                          }
                          pauVar245 = pauVar245 + 9;
                          pauVar236 = pauVar236 + 9;
                        }
                      }
                      for (uVar210 = (long)iVar187 & 0xfffffffffffffffe;
                          (long)uVar210 < (long)iVar187; uVar210 = uVar210 + 1) {
                        local_840._0_4_ = (uint)uVar210;
                        local_840._4_4_ = (undefined4)(uVar210 >> 0x20);
                        uVar196 = (long)top_blob->h * (long)top_blob->w;
                        uVar209 = top_blob->elemsize;
                        uVar229 = (uVar209 * uVar196 + 0xf & 0xfffffffffffffff0) / uVar209;
                        if (top_blob->dims == 4) {
                          uVar229 = uVar196;
                        }
                        if (pvVar204 == (void *)0x0) {
                          uVar306 = 0;
                          uVar266 = 0;
                          uVar307 = 0;
                          uVar308 = 0;
                        }
                        else {
                          puVar224 = (undefined8 *)((long)pvVar204 + uVar210 * 0x20);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                          uVar307 = puVar224[2];
                          uVar308 = puVar224[3];
                        }
                        puVar214 = (undefined8 *)
                                   (top_blob->cstep * uVar210 * uVar209 + (long)top_blob->data);
                        iVar188 = (int)uVar229 * top_blob->d;
                        puVar224 = puVar214;
                        if (iVar188 < 1) {
                          iVar188 = 0;
                        }
                        while (bVar186 = iVar188 != 0, iVar188 = iVar188 + -1, bVar186) {
                          *puVar224 = uVar266;
                          puVar224[1] = uVar306;
                          puVar224[2] = uVar307;
                          puVar224[3] = uVar308;
                          puVar224 = puVar224 + 4;
                        }
                        pauVar199 = (undefined1 (*) [12])
                                    ((this->weight_data_tm).cstep * uVar210 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        for (uVar209 = 0; uVar209 != uVar247; uVar209 = uVar209 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar209 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar200 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          auVar156 = *pauVar199;
                          auVar153 = *pauVar199;
                          auVar151 = *pauVar199;
                          auVar146 = *pauVar199;
                          uStack_b34 = (undefined4)((ulong)*(undefined8 *)(*pauVar199 + 8) >> 0x20);
                          uStack_b30 = (undefined4)*(undefined8 *)(pauVar199[1] + 4);
                          uStack_b2c = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar199[1] + 4) >> 0x20);
                          uStack_b28 = (undefined4)*(undefined8 *)pauVar199[2];
                          uStack_b24 = (undefined4)((ulong)*(undefined8 *)pauVar199[2] >> 0x20);
                          pauVar1 = (undefined1 (*) [12])(pauVar199[2] + 8);
                          auVar157 = *pauVar1;
                          auVar154 = *pauVar1;
                          auVar149 = *pauVar1;
                          auVar147 = *pauVar1;
                          uStack_ad4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar199[3] + 4) >> 0x20);
                          uStack_ad0 = (undefined4)*(undefined8 *)pauVar199[4];
                          uStack_acc = (undefined4)((ulong)*(undefined8 *)pauVar199[4] >> 0x20);
                          uStack_ac8 = (undefined4)*(undefined8 *)(pauVar199[4] + 8);
                          uStack_ac4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar199[4] + 8) >> 0x20);
                          pauVar236 = (undefined1 (*) [32])(pauVar199[5] + 4);
                          auVar1114 = *pauVar236;
                          auVar304 = *pauVar236;
                          auVar593 = *pauVar236;
                          auVar376 = *pauVar236;
                          pauVar236 = (undefined1 (*) [32])(pauVar199 + 8);
                          uStack_a38 = *(undefined8 *)(pauVar199[8] + 8);
                          uStack_a30 = *(undefined8 *)(pauVar199[9] + 4);
                          uStack_a28 = *(undefined8 *)pauVar199[10];
                          auVar1115 = *pauVar236;
                          auVar594 = *pauVar236;
                          auVar1215 = *pauVar236;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar236;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          pauVar236 = (undefined1 (*) [32])(pauVar199[10] + 8);
                          uStack_a58 = *(undefined8 *)(pauVar199[0xb] + 4);
                          uStack_a50 = *(undefined8 *)pauVar199[0xc];
                          uStack_a48 = *(undefined8 *)(pauVar199[0xc] + 8);
                          auVar1116 = *pauVar236;
                          auVar595 = *pauVar236;
                          auVar1449 = *pauVar236;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar236;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          pauVar236 = (undefined1 (*) [32])(pauVar199[0xd] + 4);
                          uStack_a78 = *(undefined8 *)pauVar199[0xe];
                          uStack_a70 = *(undefined8 *)(pauVar199[0xe] + 8);
                          uStack_a68 = *(undefined8 *)(pauVar199[0xf] + 4);
                          auVar1117 = *pauVar236;
                          auVar1112 = *pauVar236;
                          auVar1485 = *pauVar236;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar236;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          pauVar236 = (undefined1 (*) [32])(pauVar199 + 0x10);
                          uStack_a18 = *(undefined8 *)(pauVar199[0x10] + 8);
                          uStack_a10 = *(undefined8 *)(pauVar199[0x11] + 4);
                          uStack_a08 = *(undefined8 *)pauVar199[0x12];
                          auVar1118 = *pauVar236;
                          auVar1113 = *pauVar236;
                          auVar613 = *pauVar236;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar236;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          pauVar1 = (undefined1 (*) [12])(pauVar199[0x12] + 8);
                          auVar158 = *pauVar1;
                          auVar155 = *pauVar1;
                          auVar152 = *pauVar1;
                          auVar150 = *pauVar1;
                          auVar148 = *pauVar1;
                          uStack_b74 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar199[0x13] + 4) >> 0x20);
                          uStack_b70 = (undefined4)*(undefined8 *)pauVar199[0x14];
                          uStack_b6c = (undefined4)((ulong)*(undefined8 *)pauVar199[0x14] >> 0x20);
                          uStack_b68 = (undefined4)*(undefined8 *)(pauVar199[0x14] + 8);
                          uStack_b64 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar199[0x14] + 8) >> 0x20);
                          local_a00 = *(undefined1 (*) [32])(pauVar199[0x15] + 4);
                          puVar224 = puVar214;
                          for (uVar244 = 0; uVar244 != uVar259; uVar244 = uVar244 + 1) {
                            lVar208 = 0;
                            puVar231 = puVar224;
                            for (iVar188 = 0; iVar188 + 3 < iVar257; iVar188 = iVar188 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar484._4_4_ = uVar211;
                              auVar484._0_4_ = uVar211;
                              auVar484._8_4_ = uVar211;
                              auVar484._12_4_ = uVar211;
                              auVar484._16_4_ = uVar211;
                              auVar484._20_4_ = uVar211;
                              auVar484._24_4_ = uVar211;
                              auVar484._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar1500._4_4_ = uVar211;
                              auVar1500._0_4_ = uVar211;
                              auVar1500._8_4_ = uVar211;
                              auVar1500._12_4_ = uVar211;
                              auVar1500._16_4_ = uVar211;
                              auVar1500._20_4_ = uVar211;
                              auVar1500._24_4_ = uVar211;
                              auVar1500._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar1109._4_4_ = uVar211;
                              auVar1109._0_4_ = uVar211;
                              auVar1109._8_4_ = uVar211;
                              auVar1109._12_4_ = uVar211;
                              auVar1109._16_4_ = uVar211;
                              auVar1109._20_4_ = uVar211;
                              auVar1109._24_4_ = uVar211;
                              auVar1109._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar1182._4_4_ = uVar211;
                              auVar1182._0_4_ = uVar211;
                              auVar1182._8_4_ = uVar211;
                              auVar1182._12_4_ = uVar211;
                              auVar1182._16_4_ = uVar211;
                              auVar1182._20_4_ = uVar211;
                              auVar1182._24_4_ = uVar211;
                              auVar1182._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar1424._4_4_ = uVar211;
                              auVar1424._0_4_ = uVar211;
                              auVar1424._8_4_ = uVar211;
                              auVar1424._12_4_ = uVar211;
                              auVar1424._16_4_ = uVar211;
                              auVar1424._20_4_ = uVar211;
                              auVar1424._24_4_ = uVar211;
                              auVar1424._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              local_960._4_4_ = uVar211;
                              local_960._0_4_ = uVar211;
                              local_960._8_4_ = uVar211;
                              local_960._12_4_ = uVar211;
                              local_960._16_4_ = uVar211;
                              local_960._20_4_ = uVar211;
                              local_960._24_4_ = uVar211;
                              local_960._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar381._4_4_ = uVar211;
                              auVar381._0_4_ = uVar211;
                              auVar381._8_4_ = uVar211;
                              auVar381._12_4_ = uVar211;
                              auVar381._16_4_ = uVar211;
                              auVar381._20_4_ = uVar211;
                              auVar381._24_4_ = uVar211;
                              auVar381._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar742._4_4_ = uVar211;
                              auVar742._0_4_ = uVar211;
                              auVar742._8_4_ = uVar211;
                              auVar742._12_4_ = uVar211;
                              auVar742._16_4_ = uVar211;
                              auVar742._20_4_ = uVar211;
                              auVar742._24_4_ = uVar211;
                              auVar742._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              local_980._4_4_ = uVar211;
                              local_980._0_4_ = uVar211;
                              local_980._8_4_ = uVar211;
                              local_980._12_4_ = uVar211;
                              local_980._16_4_ = uVar211;
                              local_980._20_4_ = uVar211;
                              local_980._24_4_ = uVar211;
                              local_980._28_4_ = uVar211;
                              auVar104._12_4_ = uStack_b34;
                              auVar104._0_12_ = auVar146;
                              auVar104._16_4_ = uStack_b30;
                              auVar104._20_4_ = uStack_b2c;
                              auVar104._24_4_ = uStack_b28;
                              auVar104._28_4_ = uStack_b24;
                              auVar268 = vfmadd213ps_fma(auVar484,auVar104,
                                                         *(undefined1 (*) [32])(puVar224 + lVar208))
                              ;
                              auVar142._12_4_ = uStack_ad4;
                              auVar142._0_12_ = auVar147;
                              auVar142._16_4_ = uStack_ad0;
                              auVar142._20_4_ = uStack_acc;
                              auVar142._24_4_ = uStack_ac8;
                              auVar142._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1500,auVar142);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1109,auVar376);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1182);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1424,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar1485);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar381);
                              auVar64._12_4_ = uStack_b74;
                              auVar64._0_12_ = auVar148;
                              auVar64._16_4_ = uStack_b70;
                              auVar64._20_4_ = uStack_b6c;
                              auVar64._24_4_ = uStack_b68;
                              auVar64._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar742,auVar64);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar1183._4_4_ = uVar211;
                              auVar1183._0_4_ = uVar211;
                              auVar1183._8_4_ = uVar211;
                              auVar1183._12_4_ = uVar211;
                              auVar1183._16_4_ = uVar211;
                              auVar1183._20_4_ = uVar211;
                              auVar1183._24_4_ = uVar211;
                              auVar1183._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              local_880._4_4_ = uVar211;
                              local_880._0_4_ = uVar211;
                              local_880._8_4_ = uVar211;
                              local_880._12_4_ = uVar211;
                              local_880._16_4_ = uVar211;
                              local_880._20_4_ = uVar211;
                              local_880._24_4_ = uVar211;
                              local_880._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,local_a00);
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              local_9a0._4_4_ = uVar211;
                              local_9a0._0_4_ = uVar211;
                              local_9a0._8_4_ = uVar211;
                              local_9a0._12_4_ = uVar211;
                              local_9a0._16_4_ = uVar211;
                              local_9a0._20_4_ = uVar211;
                              local_9a0._24_4_ = uVar211;
                              local_9a0._28_4_ = uVar211;
                              *(undefined1 (*) [32])(puVar224 + lVar208) = ZEXT1632(auVar268);
                              auVar268 = vfmadd213ps_fma(auVar1500,auVar104,
                                                         *(undefined1 (*) [32])
                                                          (puVar224 + lVar208 + 4));
                              auVar143._12_4_ = uStack_ad4;
                              auVar143._0_12_ = auVar149;
                              auVar143._16_4_ = uStack_ad0;
                              auVar143._20_4_ = uStack_acc;
                              auVar143._24_4_ = uStack_ac8;
                              auVar143._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1109,auVar143);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1183,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1424);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar1485);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar742);
                              auVar65._12_4_ = uStack_b74;
                              auVar65._0_12_ = auVar150;
                              auVar65._16_4_ = uStack_b70;
                              auVar65._20_4_ = uStack_b6c;
                              auVar65._24_4_ = uStack_b68;
                              auVar65._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar65);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_9a0,local_a00);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                              auVar856._4_4_ = uVar211;
                              auVar856._0_4_ = uVar211;
                              auVar856._8_4_ = uVar211;
                              auVar856._12_4_ = uVar211;
                              auVar856._16_4_ = uVar211;
                              auVar856._20_4_ = uVar211;
                              auVar856._24_4_ = uVar211;
                              auVar856._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                              auVar1482._4_4_ = uVar211;
                              auVar1482._0_4_ = uVar211;
                              auVar1482._8_4_ = uVar211;
                              auVar1482._12_4_ = uVar211;
                              auVar1482._16_4_ = uVar211;
                              auVar1482._20_4_ = uVar211;
                              auVar1482._24_4_ = uVar211;
                              auVar1482._28_4_ = uVar211;
                              local_9c0._4_4_ = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                              local_9c0._0_4_ = local_9c0._4_4_;
                              local_9c0._8_4_ = local_9c0._4_4_;
                              uStack_9b4 = local_9c0._4_4_;
                              uStack_9b0 = local_9c0._4_4_;
                              uStack_9ac = local_9c0._4_4_;
                              uStack_9a8 = local_9c0._4_4_;
                              uStack_9a4 = local_9c0._4_4_;
                              *(undefined1 (*) [32])(puVar224 + lVar208 + 4) = ZEXT1632(auVar268);
                              auVar105._12_4_ = uStack_b34;
                              auVar105._0_12_ = auVar151;
                              auVar105._16_4_ = uStack_b30;
                              auVar105._20_4_ = uStack_b2c;
                              auVar105._24_4_ = uStack_b28;
                              auVar105._28_4_ = uStack_b24;
                              auVar268 = vfmadd213ps_fma(auVar1109,auVar105,
                                                         *(undefined1 (*) [32])
                                                          (puVar224 + lVar208 + 8));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1183,auVar143);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar856,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1482,auVar1485);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_9a0,auVar65);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                              auVar1346._4_4_ = uVar211;
                              auVar1346._0_4_ = uVar211;
                              auVar1346._8_4_ = uVar211;
                              auVar1346._12_4_ = uVar211;
                              auVar1346._16_4_ = uVar211;
                              auVar1346._20_4_ = uVar211;
                              auVar1346._24_4_ = uVar211;
                              auVar1346._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                              auVar1425._4_4_ = uVar211;
                              auVar1425._0_4_ = uVar211;
                              auVar1425._8_4_ = uVar211;
                              auVar1425._12_4_ = uVar211;
                              auVar1425._16_4_ = uVar211;
                              auVar1425._20_4_ = uVar211;
                              auVar1425._24_4_ = uVar211;
                              auVar1425._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                              auVar1501._4_4_ = uVar211;
                              auVar1501._0_4_ = uVar211;
                              auVar1501._8_4_ = uVar211;
                              auVar1501._12_4_ = uVar211;
                              auVar1501._16_4_ = uVar211;
                              auVar1501._20_4_ = uVar211;
                              auVar1501._24_4_ = uVar211;
                              auVar1501._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,local_a00);
                              *(undefined1 (*) [32])(puVar224 + lVar208 + 8) = ZEXT1632(auVar268);
                              auVar268 = vfmadd213ps_fma(auVar1183,auVar105,
                                                         *(undefined1 (*) [32])
                                                          (puVar224 + lVar208 + 0xc));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar143,auVar856);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1346);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1482);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1425);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,local_9a0);
                              auVar66._12_4_ = uStack_b74;
                              auVar66._0_12_ = auVar152;
                              auVar66._16_4_ = uStack_b70;
                              auVar66._20_4_ = uStack_b6c;
                              auVar66._24_4_ = uStack_b68;
                              auVar66._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar66);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_a00,auVar1501);
                              *(undefined1 (*) [32])(puVar224 + lVar208 + 0xc) = ZEXT1632(auVar268);
                              puVar231 = puVar231 + 0x10;
                              lVar208 = lVar208 + 0x10;
                            }
                            for (; iVar188 + 1 < iVar257; iVar188 = iVar188 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar485._4_4_ = uVar211;
                              auVar485._0_4_ = uVar211;
                              auVar485._8_4_ = uVar211;
                              auVar485._12_4_ = uVar211;
                              auVar485._16_4_ = uVar211;
                              auVar485._20_4_ = uVar211;
                              auVar485._24_4_ = uVar211;
                              auVar485._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar1110._4_4_ = uVar211;
                              auVar1110._0_4_ = uVar211;
                              auVar1110._8_4_ = uVar211;
                              auVar1110._12_4_ = uVar211;
                              auVar1110._16_4_ = uVar211;
                              auVar1110._20_4_ = uVar211;
                              auVar1110._24_4_ = uVar211;
                              auVar1110._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar1347._4_4_ = uVar211;
                              auVar1347._0_4_ = uVar211;
                              auVar1347._8_4_ = uVar211;
                              auVar1347._12_4_ = uVar211;
                              auVar1347._16_4_ = uVar211;
                              auVar1347._20_4_ = uVar211;
                              auVar1347._24_4_ = uVar211;
                              auVar1347._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar1426._4_4_ = uVar211;
                              auVar1426._0_4_ = uVar211;
                              auVar1426._8_4_ = uVar211;
                              auVar1426._12_4_ = uVar211;
                              auVar1426._16_4_ = uVar211;
                              auVar1426._20_4_ = uVar211;
                              auVar1426._24_4_ = uVar211;
                              auVar1426._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar1502._4_4_ = uVar211;
                              auVar1502._0_4_ = uVar211;
                              auVar1502._8_4_ = uVar211;
                              auVar1502._12_4_ = uVar211;
                              auVar1502._16_4_ = uVar211;
                              auVar1502._20_4_ = uVar211;
                              auVar1502._24_4_ = uVar211;
                              auVar1502._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              local_880._4_4_ = uVar211;
                              local_880._0_4_ = uVar211;
                              local_880._8_4_ = uVar211;
                              local_880._12_4_ = uVar211;
                              local_880._16_4_ = uVar211;
                              local_880._20_4_ = uVar211;
                              local_880._24_4_ = uVar211;
                              local_880._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar1483._4_4_ = uVar211;
                              auVar1483._0_4_ = uVar211;
                              auVar1483._8_4_ = uVar211;
                              auVar1483._12_4_ = uVar211;
                              auVar1483._16_4_ = uVar211;
                              auVar1483._20_4_ = uVar211;
                              auVar1483._24_4_ = uVar211;
                              auVar1483._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              local_9c0._4_4_ = uVar211;
                              local_9c0._0_4_ = uVar211;
                              local_9c0._8_4_ = uVar211;
                              uStack_9b4 = uVar211;
                              uStack_9b0 = uVar211;
                              uStack_9ac = uVar211;
                              uStack_9a8 = uVar211;
                              uStack_9a4 = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar382._4_4_ = uVar211;
                              auVar382._0_4_ = uVar211;
                              auVar382._8_4_ = uVar211;
                              auVar382._12_4_ = uVar211;
                              auVar382._16_4_ = uVar211;
                              auVar382._20_4_ = uVar211;
                              auVar382._24_4_ = uVar211;
                              auVar382._28_4_ = uVar211;
                              auVar106._12_4_ = uStack_b34;
                              auVar106._0_12_ = auVar153;
                              auVar106._16_4_ = uStack_b30;
                              auVar106._20_4_ = uStack_b2c;
                              auVar106._24_4_ = uStack_b28;
                              auVar106._28_4_ = uStack_b24;
                              auVar268 = vfmadd213ps_fma(auVar485,auVar106,
                                                         *(undefined1 (*) [32])(puVar224 + lVar208))
                              ;
                              auVar144._12_4_ = uStack_ad4;
                              auVar144._0_12_ = auVar154;
                              auVar144._16_4_ = uStack_ad0;
                              auVar144._20_4_ = uStack_acc;
                              auVar144._24_4_ = uStack_ac8;
                              auVar144._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1110,auVar144);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1347,auVar304);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1426);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1502,auVar595);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar1112);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1113,auVar1483);
                              auVar67._12_4_ = uStack_b74;
                              auVar67._0_12_ = auVar155;
                              auVar67._16_4_ = uStack_b70;
                              auVar67._20_4_ = uStack_b6c;
                              auVar67._24_4_ = uStack_b68;
                              auVar67._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar67);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar1427._4_4_ = uVar211;
                              auVar1427._0_4_ = uVar211;
                              auVar1427._8_4_ = uVar211;
                              auVar1427._12_4_ = uVar211;
                              auVar1427._16_4_ = uVar211;
                              auVar1427._20_4_ = uVar211;
                              auVar1427._24_4_ = uVar211;
                              auVar1427._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar1484._4_4_ = uVar211;
                              auVar1484._0_4_ = uVar211;
                              auVar1484._8_4_ = uVar211;
                              auVar1484._12_4_ = uVar211;
                              auVar1484._16_4_ = uVar211;
                              auVar1484._20_4_ = uVar211;
                              auVar1484._24_4_ = uVar211;
                              auVar1484._28_4_ = uVar211;
                              local_9a0._4_4_ = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              local_9a0._0_4_ = local_9a0._4_4_;
                              local_9a0._8_4_ = local_9a0._4_4_;
                              local_9a0._12_4_ = local_9a0._4_4_;
                              local_9a0._16_4_ = local_9a0._4_4_;
                              local_9a0._20_4_ = local_9a0._4_4_;
                              local_9a0._24_4_ = local_9a0._4_4_;
                              local_9a0._28_4_ = local_9a0._4_4_;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar382,local_a00);
                              *(undefined1 (*) [32])(puVar224 + lVar208) = ZEXT1632(auVar268);
                              auVar268 = vfmadd213ps_fma(auVar1110,auVar106,
                                                         *(undefined1 (*) [32])
                                                          (puVar224 + lVar208 + 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar144,auVar1347);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1427);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1502);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar595,local_880);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1112,auVar1484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1113,_local_9c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar67,auVar382);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_a00,local_9a0);
                              *(undefined1 (*) [32])(puVar224 + lVar208 + 4) = ZEXT1632(auVar268);
                              puVar231 = puVar231 + 8;
                              lVar208 = lVar208 + 8;
                            }
                            for (; iVar188 < iVar257; iVar188 = iVar188 + 1) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar303._4_4_ = uVar211;
                              auVar303._0_4_ = uVar211;
                              auVar303._8_4_ = uVar211;
                              auVar303._12_4_ = uVar211;
                              auVar303._16_4_ = uVar211;
                              auVar303._20_4_ = uVar211;
                              auVar303._24_4_ = uVar211;
                              auVar303._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar383._4_4_ = uVar211;
                              auVar383._0_4_ = uVar211;
                              auVar383._8_4_ = uVar211;
                              auVar383._12_4_ = uVar211;
                              auVar383._16_4_ = uVar211;
                              auVar383._20_4_ = uVar211;
                              auVar383._24_4_ = uVar211;
                              auVar383._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar486._4_4_ = uVar211;
                              auVar486._0_4_ = uVar211;
                              auVar486._8_4_ = uVar211;
                              auVar486._12_4_ = uVar211;
                              auVar486._16_4_ = uVar211;
                              auVar486._20_4_ = uVar211;
                              auVar486._24_4_ = uVar211;
                              auVar486._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar1111._4_4_ = uVar211;
                              auVar1111._0_4_ = uVar211;
                              auVar1111._8_4_ = uVar211;
                              auVar1111._12_4_ = uVar211;
                              auVar1111._16_4_ = uVar211;
                              auVar1111._20_4_ = uVar211;
                              auVar1111._24_4_ = uVar211;
                              auVar1111._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar1184._4_4_ = uVar211;
                              auVar1184._0_4_ = uVar211;
                              auVar1184._8_4_ = uVar211;
                              auVar1184._12_4_ = uVar211;
                              auVar1184._16_4_ = uVar211;
                              auVar1184._20_4_ = uVar211;
                              auVar1184._24_4_ = uVar211;
                              auVar1184._28_4_ = uVar211;
                              auVar107._12_4_ = uStack_b34;
                              auVar107._0_12_ = auVar156;
                              auVar107._16_4_ = uStack_b30;
                              auVar107._20_4_ = uStack_b2c;
                              auVar107._24_4_ = uStack_b28;
                              auVar107._28_4_ = uStack_b24;
                              auVar268 = vfmadd213ps_fma(auVar303,auVar107,
                                                         *(undefined1 (*) [32])(puVar224 + lVar208))
                              ;
                              auVar145._12_4_ = uStack_ad4;
                              auVar145._0_12_ = auVar157;
                              auVar145._16_4_ = uStack_ad0;
                              auVar145._20_4_ = uStack_acc;
                              auVar145._24_4_ = uStack_ac8;
                              auVar145._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar383,auVar145);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar486,auVar1114);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar384._4_4_ = uVar211;
                              auVar384._0_4_ = uVar211;
                              auVar384._8_4_ = uVar211;
                              auVar384._12_4_ = uVar211;
                              auVar384._16_4_ = uVar211;
                              auVar384._20_4_ = uVar211;
                              auVar384._24_4_ = uVar211;
                              auVar384._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1111,auVar1115);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1184,auVar1116);
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar487._4_4_ = uVar211;
                              auVar487._0_4_ = uVar211;
                              auVar487._8_4_ = uVar211;
                              auVar487._12_4_ = uVar211;
                              auVar487._16_4_ = uVar211;
                              auVar487._20_4_ = uVar211;
                              auVar487._24_4_ = uVar211;
                              auVar487._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar384,auVar1117);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar487,auVar1118);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar385._4_4_ = uVar211;
                              auVar385._0_4_ = uVar211;
                              auVar385._8_4_ = uVar211;
                              auVar385._12_4_ = uVar211;
                              auVar385._16_4_ = uVar211;
                              auVar385._20_4_ = uVar211;
                              auVar385._24_4_ = uVar211;
                              auVar385._28_4_ = uVar211;
                              auVar68._12_4_ = uStack_b74;
                              auVar68._0_12_ = auVar158;
                              auVar68._16_4_ = uStack_b70;
                              auVar68._20_4_ = uStack_b6c;
                              auVar68._24_4_ = uStack_b68;
                              auVar68._28_4_ = uStack_b64;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar385,auVar68);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar386._4_4_ = uVar211;
                              auVar386._0_4_ = uVar211;
                              auVar386._8_4_ = uVar211;
                              auVar386._12_4_ = uVar211;
                              auVar386._16_4_ = uVar211;
                              auVar386._20_4_ = uVar211;
                              auVar386._24_4_ = uVar211;
                              auVar386._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar386,local_a00);
                              *(undefined1 (*) [32])(puVar224 + lVar208) = ZEXT1632(auVar268);
                              puVar231 = puVar231 + 4;
                              lVar208 = lVar208 + 4;
                            }
                            piVar222 = (int *)((long)piVar222 + lVar208 + 8);
                            piVar255 = (int *)((long)piVar255 + lVar208 + 8);
                            lVar200 = lVar200 + lVar208 + 8;
                            puVar224 = puVar231;
                          }
                          pauVar199 = pauVar199 + 0x18;
                        }
                      }
                      goto LAB_001c197f;
                    }
                    bVar186 = true;
                    if ((iVar257 == 2 && iVar249 == 2) && (char)(uVar244 ^ 0xf) == '\0') {
                      iVar187 = top_blob->w;
                      iVar257 = top_blob->h;
                      iVar188 = top_blob->c;
                      pvVar204 = (this->super_Convolution).bias_data.data;
                      if (iVar257 < 1) {
                        iVar257 = 0;
                      }
                      lVar200 = (long)((local_920.w - iVar187) * 2);
                      uVar210 = (ulong)(uint)local_920.c;
                      if (local_920.c < 1) {
                        uVar210 = 0;
                      }
                      local_6f0._0_8_ = (ulong)(uint)(iVar188 >> 1);
                      if (iVar188 >> 1 < 1) {
                        local_6f0._0_8_ = 0;
                      }
                      for (uVar209 = 0; uVar209 != local_6f0._0_8_; uVar209 = uVar209 + 1) {
                        uVar242 = (long)top_blob->h * (long)top_blob->w;
                        uVar229 = top_blob->elemsize;
                        uVar196 = (uVar229 * uVar242 + 0xf & 0xfffffffffffffff0) / uVar229;
                        if (top_blob->dims == 4) {
                          uVar196 = uVar242;
                        }
                        lVar208 = uVar209 * 2 + 1;
                        if (pvVar204 == (void *)0x0) {
                          auVar376 = SUB6432(ZEXT864(0),0) << 0x40;
                          uVar306 = 0;
                          uVar266 = 0;
                          uVar307 = 0;
                          uVar308 = 0;
                        }
                        else {
                          auVar376 = *(undefined1 (*) [32])((long)pvVar204 + uVar209 * 0x40);
                          puVar224 = (undefined8 *)((long)pvVar204 + lVar208 * 0x20);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                          uVar307 = puVar224[2];
                          uVar308 = puVar224[3];
                        }
                        lVar234 = uVar229 * top_blob->cstep;
                        pauVar253 = (undefined1 (*) [32])
                                    (lVar234 * uVar209 * 2 + (long)top_blob->data);
                        pauVar245 = (undefined1 (*) [32])(lVar234 * lVar208 + (long)top_blob->data);
                        iVar258 = (int)uVar196 * top_blob->d;
                        pauVar236 = pauVar253;
                        iVar239 = iVar258;
                        if (iVar258 < 1) {
                          iVar258 = 0;
                          iVar239 = iVar258;
                        }
                        while (bVar186 = iVar258 != 0, iVar258 = iVar258 + -1, pauVar195 = pauVar245
                              , bVar186) {
                          *pauVar236 = auVar376;
                          pauVar236 = pauVar236 + 1;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *(undefined8 *)*pauVar195 = uVar266;
                          *(undefined8 *)(*pauVar195 + 8) = uVar306;
                          *(undefined8 *)(*pauVar195 + 0x10) = uVar307;
                          *(undefined8 *)(*pauVar195 + 0x18) = uVar308;
                          pauVar195 = pauVar195 + 1;
                        }
                        pvVar251 = (this->weight_data_tm).data;
                        lVar234 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                        pauVar236 = (undefined1 (*) [32])(uVar209 * 2 * lVar234 + (long)pvVar251);
                        local_b08 = (undefined1 (*) [32])(lVar234 * lVar208 + (long)pvVar251);
                        for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                          piVar255 = (int *)(local_920.cstep * uVar229 * local_920.elemsize +
                                            (long)local_920.data);
                          uStack_838 = *(undefined8 *)(*pauVar236 + 8);
                          uStack_830 = *(undefined8 *)(*pauVar236 + 0x10);
                          uStack_828 = *(undefined8 *)(*pauVar236 + 0x18);
                          auVar1498 = *pauVar236;
                          auVar1032 = *pauVar236;
                          auVar823 = *pauVar236;
                          auVar124 = *pauVar236;
                          auVar106 = *pauVar236;
                          auVar1482 = *pauVar236;
                          auVar64 = *pauVar236;
                          auVar376 = *pauVar236;
                          local_840._0_4_ = (uint)*(undefined8 *)*pauVar236;
                          local_840._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar236 >> 0x20);
                          pauVar195 = pauVar236 + 1;
                          uStack_778 = *(undefined8 *)(pauVar236[1] + 8);
                          uStack_770 = *(undefined8 *)(pauVar236[1] + 0x10);
                          uStack_768 = *(undefined8 *)(pauVar236[1] + 0x18);
                          auVar48 = *pauVar195;
                          auVar824 = *pauVar195;
                          auVar125 = *pauVar195;
                          auVar144 = *pauVar195;
                          auVar1183 = *pauVar195;
                          auVar1215 = *pauVar195;
                          local_780._0_4_ = (int)*(undefined8 *)*pauVar195;
                          local_780._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar236 + 2;
                          uStack_a18 = *(undefined8 *)(pauVar236[2] + 8);
                          uStack_a10 = *(undefined8 *)(pauVar236[2] + 0x10);
                          uStack_a08 = *(undefined8 *)(pauVar236[2] + 0x18);
                          auVar49 = *pauVar195;
                          auVar909 = *pauVar195;
                          auVar562 = *pauVar195;
                          auVar87 = *pauVar195;
                          auVar382 = *pauVar195;
                          auVar1346 = *pauVar195;
                          auVar742 = *pauVar195;
                          auVar65 = *pauVar195;
                          auVar1115 = *pauVar195;
                          auVar1449 = *pauVar195;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar195;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar236 + 3;
                          auVar180 = *(undefined1 (*) [12])*pauVar195;
                          auVar177 = *(undefined1 (*) [12])*pauVar195;
                          auVar174 = *(undefined1 (*) [12])*pauVar195;
                          auVar172 = *(undefined1 (*) [12])*pauVar195;
                          auVar169 = *(undefined1 (*) [12])*pauVar195;
                          auVar166 = *(undefined1 (*) [12])*pauVar195;
                          auVar164 = *(undefined1 (*) [12])*pauVar195;
                          auVar161 = *(undefined1 (*) [12])*pauVar195;
                          auVar157 = *(undefined1 (*) [12])*pauVar195;
                          auVar155 = *(undefined1 (*) [12])*pauVar195;
                          auVar152 = *(undefined1 (*) [12])*pauVar195;
                          auVar147 = *(undefined1 (*) [12])*pauVar195;
                          uStack_b74 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[3] + 8) >> 0x20);
                          uStack_b70 = (undefined4)*(undefined8 *)(pauVar236[3] + 0x10);
                          uStack_b6c = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[3] + 0x10) >> 0x20);
                          uStack_b68 = (undefined4)*(undefined8 *)(pauVar236[3] + 0x18);
                          uStack_b64 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[3] + 0x18) >> 0x20);
                          pauVar195 = pauVar236 + 4;
                          auVar90 = *pauVar195;
                          auVar911 = *pauVar195;
                          auVar699 = *pauVar195;
                          auVar457 = *pauVar195;
                          auVar45 = *pauVar195;
                          auVar1501 = *pauVar195;
                          auVar1109 = *pauVar195;
                          auVar143 = *pauVar195;
                          auVar1117 = *pauVar195;
                          auVar1112 = *pauVar195;
                          auVar613 = *pauVar195;
                          pauVar195 = pauVar236 + 5;
                          uStack_a38 = *(undefined8 *)(pauVar236[5] + 8);
                          uStack_a30 = *(undefined8 *)(pauVar236[5] + 0x10);
                          uStack_a28 = *(undefined8 *)(pauVar236[5] + 0x18);
                          auVar127 = *pauVar195;
                          auVar976 = *pauVar195;
                          auVar700 = *pauVar195;
                          auVar88 = *pauVar195;
                          auVar46 = *pauVar195;
                          auVar1424 = *pauVar195;
                          auVar1182 = *pauVar195;
                          auVar66 = *pauVar195;
                          auVar1118 = *pauVar195;
                          auVar1113 = *pauVar195;
                          auVar593 = *pauVar195;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar195;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          pauVar195 = pauVar236 + 6;
                          auVar181 = *(undefined1 (*) [12])*pauVar195;
                          auVar178 = *(undefined1 (*) [12])*pauVar195;
                          auVar175 = *(undefined1 (*) [12])*pauVar195;
                          auVar170 = *(undefined1 (*) [12])*pauVar195;
                          auVar167 = *(undefined1 (*) [12])*pauVar195;
                          auVar165 = *(undefined1 (*) [12])*pauVar195;
                          auVar162 = *(undefined1 (*) [12])*pauVar195;
                          auVar159 = *(undefined1 (*) [12])*pauVar195;
                          auVar156 = *(undefined1 (*) [12])*pauVar195;
                          auVar153 = *(undefined1 (*) [12])*pauVar195;
                          auVar150 = *(undefined1 (*) [12])*pauVar195;
                          auVar148 = *(undefined1 (*) [12])*pauVar195;
                          uStack_b34 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[6] + 8) >> 0x20);
                          uStack_b30 = (undefined4)*(undefined8 *)(pauVar236[6] + 0x10);
                          uStack_b2c = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[6] + 0x10) >> 0x20);
                          uStack_b28 = (undefined4)*(undefined8 *)(pauVar236[6] + 0x18);
                          uStack_b24 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar236[6] + 0x18) >> 0x20);
                          local_a00 = pauVar236[7];
                          pauVar195 = pauVar236 + 8;
                          uStack_758 = *(undefined8 *)(pauVar236[8] + 8);
                          uStack_750 = *(undefined8 *)(pauVar236[8] + 0x10);
                          uStack_748 = *(undefined8 *)(pauVar236[8] + 0x18);
                          auVar458 = *pauVar195;
                          auVar1034 = *pauVar195;
                          auVar978 = *pauVar195;
                          auVar86 = *pauVar195;
                          auVar484 = *pauVar195;
                          auVar105 = *pauVar195;
                          auVar594 = *pauVar195;
                          local_760 = (int)*(undefined8 *)*pauVar195;
                          iStack_75c = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          local_9a0 = *local_b08;
                          pauVar195 = local_b08 + 1;
                          auVar179 = *(undefined1 (*) [12])*pauVar195;
                          auVar176 = *(undefined1 (*) [12])*pauVar195;
                          auVar173 = *(undefined1 (*) [12])*pauVar195;
                          auVar171 = *(undefined1 (*) [12])*pauVar195;
                          auVar168 = *(undefined1 (*) [12])*pauVar195;
                          auVar163 = *(undefined1 (*) [12])*pauVar195;
                          auVar160 = *(undefined1 (*) [12])*pauVar195;
                          auVar158 = *(undefined1 (*) [12])*pauVar195;
                          auVar154 = *(undefined1 (*) [12])*pauVar195;
                          auVar151 = *(undefined1 (*) [12])*pauVar195;
                          auVar149 = *(undefined1 (*) [12])*pauVar195;
                          auVar146 = *(undefined1 (*) [12])*pauVar195;
                          uStack_ad4 = (undefined4)
                                       ((ulong)*(undefined8 *)(local_b08[1] + 8) >> 0x20);
                          uStack_ad0 = (undefined4)*(undefined8 *)(local_b08[1] + 0x10);
                          uStack_acc = (undefined4)
                                       ((ulong)*(undefined8 *)(local_b08[1] + 0x10) >> 0x20);
                          uStack_ac8 = (undefined4)*(undefined8 *)(local_b08[1] + 0x18);
                          uStack_ac4 = (undefined4)
                                       ((ulong)*(undefined8 *)(local_b08[1] + 0x18) >> 0x20);
                          local_960 = local_b08[2];
                          pauVar195 = local_b08 + 3;
                          uStack_a58 = *(undefined8 *)(local_b08[3] + 8);
                          uStack_a50 = *(undefined8 *)(local_b08[3] + 0x10);
                          uStack_a48 = *(undefined8 *)(local_b08[3] + 0x18);
                          auVar89 = *pauVar195;
                          auVar910 = *pauVar195;
                          auVar698 = *pauVar195;
                          auVar126 = *pauVar195;
                          auVar485 = *pauVar195;
                          auVar1500 = *pauVar195;
                          auVar856 = *pauVar195;
                          auVar142 = *pauVar195;
                          auVar1116 = *pauVar195;
                          auVar595 = *pauVar195;
                          auVar1485 = *pauVar195;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar195;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          _local_9c0 = local_b08[4];
                          local_7c0 = local_b08[5];
                          pauVar195 = local_b08 + 6;
                          uStack_a78 = *(undefined8 *)(local_b08[6] + 8);
                          uStack_a70 = *(undefined8 *)(local_b08[6] + 0x10);
                          uStack_a68 = *(undefined8 *)(local_b08[6] + 0x18);
                          auVar128 = *pauVar195;
                          auVar1033 = *pauVar195;
                          auVar977 = *pauVar195;
                          auVar561 = *pauVar195;
                          auVar47 = *pauVar195;
                          auVar67 = *pauVar195;
                          auVar1425 = *pauVar195;
                          auVar381 = *pauVar195;
                          auVar104 = *pauVar195;
                          auVar1114 = *pauVar195;
                          auVar304 = *pauVar195;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar195;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar195 >> 0x20);
                          local_980 = local_b08[7];
                          local_880 = local_b08[8];
                          pauVar195 = pauVar245;
                          pauVar212 = pauVar253;
                          piVar222 = (int *)((long)piVar255 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar208 = (long)piVar255 + (long)local_920.w * local_920.elemsize * 2;
                          for (iVar239 = 0; iVar239 != iVar257; iVar239 = iVar239 + 1) {
                            piVar227 = piVar255 + lVar200;
                            piVar223 = piVar222 + lVar200;
                            lVar234 = lVar200 * 4 + lVar208;
                            lVar256 = 0;
                            pauVar235 = pauVar212;
                            pauVar241 = pauVar195;
                            for (iVar258 = 0; iVar258 + 7 < iVar187; iVar258 = iVar258 + 8) {
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar575._4_4_ = uVar211;
                              auVar575._0_4_ = uVar211;
                              auVar575._8_4_ = uVar211;
                              auVar575._12_4_ = uVar211;
                              auVar575._16_4_ = uVar211;
                              auVar575._20_4_ = uVar211;
                              auVar575._24_4_ = uVar211;
                              auVar575._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar718._4_4_ = uVar211;
                              auVar718._0_4_ = uVar211;
                              auVar718._8_4_ = uVar211;
                              auVar718._12_4_ = uVar211;
                              auVar718._16_4_ = uVar211;
                              auVar718._20_4_ = uVar211;
                              auVar718._24_4_ = uVar211;
                              auVar718._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar474._4_4_ = uVar211;
                              auVar474._0_4_ = uVar211;
                              auVar474._8_4_ = uVar211;
                              auVar474._12_4_ = uVar211;
                              auVar474._16_4_ = uVar211;
                              auVar474._20_4_ = uVar211;
                              auVar474._24_4_ = uVar211;
                              auVar474._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar987._4_4_ = uVar211;
                              auVar987._0_4_ = uVar211;
                              auVar987._8_4_ = uVar211;
                              auVar987._12_4_ = uVar211;
                              auVar987._16_4_ = uVar211;
                              auVar987._20_4_ = uVar211;
                              auVar987._24_4_ = uVar211;
                              auVar987._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar835._4_4_ = uVar211;
                              auVar835._0_4_ = uVar211;
                              auVar835._8_4_ = uVar211;
                              auVar835._12_4_ = uVar211;
                              auVar835._16_4_ = uVar211;
                              auVar835._20_4_ = uVar211;
                              auVar835._24_4_ = uVar211;
                              auVar835._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (*pauVar212 + lVar256 * 4),auVar575,
                                                         auVar376);
                              auVar268 = vfmadd213ps_fma(auVar575,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar195 + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar718,auVar1215);
                              auVar130._12_4_ = uStack_ad4;
                              auVar130._0_12_ = auVar146;
                              auVar130._16_4_ = uStack_ad0;
                              auVar130._20_4_ = uStack_acc;
                              auVar130._24_4_ = uStack_ac8;
                              auVar130._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar718,auVar130);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar719._4_4_ = uVar211;
                              auVar719._0_4_ = uVar211;
                              auVar719._8_4_ = uVar211;
                              auVar719._12_4_ = uVar211;
                              auVar719._16_4_ = uVar211;
                              auVar719._20_4_ = uVar211;
                              auVar719._24_4_ = uVar211;
                              auVar719._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar474,auVar1449);
                              auVar52._12_4_ = uStack_b74;
                              auVar52._0_12_ = auVar147;
                              auVar52._16_4_ = uStack_b70;
                              auVar52._20_4_ = uStack_b6c;
                              auVar52._24_4_ = uStack_b68;
                              auVar52._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar987,auVar52);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar474,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar987,auVar1485);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar988._4_4_ = uVar211;
                              auVar988._0_4_ = uVar211;
                              auVar988._8_4_ = uVar211;
                              auVar988._12_4_ = uVar211;
                              auVar988._16_4_ = uVar211;
                              auVar988._20_4_ = uVar211;
                              auVar988._24_4_ = uVar211;
                              auVar988._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar835,auVar613);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar835,_local_9c0);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1041._4_4_ = uVar211;
                              auVar1041._0_4_ = uVar211;
                              auVar1041._8_4_ = uVar211;
                              auVar1041._12_4_ = uVar211;
                              auVar1041._16_4_ = uVar211;
                              auVar1041._20_4_ = uVar211;
                              auVar1041._24_4_ = uVar211;
                              auVar1041._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar719,auVar593);
                              auVar92._12_4_ = uStack_b34;
                              auVar92._0_12_ = auVar148;
                              auVar92._16_4_ = uStack_b30;
                              auVar92._20_4_ = uStack_b2c;
                              auVar92._24_4_ = uStack_b28;
                              auVar92._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar988,auVar92);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar719,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar988,auVar304);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar836._4_4_ = uVar211;
                              auVar836._0_4_ = uVar211;
                              auVar836._8_4_ = uVar211;
                              auVar836._12_4_ = uVar211;
                              auVar836._16_4_ = uVar211;
                              auVar836._20_4_ = uVar211;
                              auVar836._24_4_ = uVar211;
                              auVar836._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1041,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar836,auVar594);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1041,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar836,local_880);
                              *(undefined1 (*) [32])(*pauVar212 + lVar256 * 4) = ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(*pauVar195 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar576._4_4_ = uVar211;
                              auVar576._0_4_ = uVar211;
                              auVar576._8_4_ = uVar211;
                              auVar576._12_4_ = uVar211;
                              auVar576._16_4_ = uVar211;
                              auVar576._20_4_ = uVar211;
                              auVar576._24_4_ = uVar211;
                              auVar576._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar919._4_4_ = uVar211;
                              auVar919._0_4_ = uVar211;
                              auVar919._8_4_ = uVar211;
                              auVar919._12_4_ = uVar211;
                              auVar919._16_4_ = uVar211;
                              auVar919._20_4_ = uVar211;
                              auVar919._24_4_ = uVar211;
                              auVar919._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[1] + lVar256 * 4),auVar474,
                                                         auVar376);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar576,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar474,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[1] + lVar256 * 4));
                              auVar131._12_4_ = uStack_ad4;
                              auVar131._0_12_ = auVar149;
                              auVar131._16_4_ = uStack_ad0;
                              auVar131._20_4_ = uStack_acc;
                              auVar131._24_4_ = uStack_ac8;
                              auVar131._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar131,auVar576);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar577._4_4_ = uVar211;
                              auVar577._0_4_ = uVar211;
                              auVar577._8_4_ = uVar211;
                              auVar577._12_4_ = uVar211;
                              auVar577._16_4_ = uVar211;
                              auVar577._20_4_ = uVar211;
                              auVar577._24_4_ = uVar211;
                              auVar577._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar577,auVar1449);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar719,auVar52);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar577,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar719,auVar595);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar720._4_4_ = uVar211;
                              auVar720._0_4_ = uVar211;
                              auVar720._8_4_ = uVar211;
                              auVar720._12_4_ = uVar211;
                              auVar720._16_4_ = uVar211;
                              auVar720._20_4_ = uVar211;
                              auVar720._24_4_ = uVar211;
                              auVar720._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar919,auVar1112);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar919);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar920._4_4_ = uVar211;
                              auVar920._0_4_ = uVar211;
                              auVar920._8_4_ = uVar211;
                              auVar920._12_4_ = uVar211;
                              auVar920._16_4_ = uVar211;
                              auVar920._20_4_ = uVar211;
                              auVar920._24_4_ = uVar211;
                              auVar920._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar920,auVar1113);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar836,auVar92);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar920,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1114,auVar836);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar837._4_4_ = uVar211;
                              auVar837._0_4_ = uVar211;
                              auVar837._8_4_ = uVar211;
                              auVar837._12_4_ = uVar211;
                              auVar837._16_4_ = uVar211;
                              auVar837._20_4_ = uVar211;
                              auVar837._24_4_ = uVar211;
                              auVar837._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar720,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar837,auVar594);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar720,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar837,local_880);
                              *(undefined1 (*) [32])(pauVar212[1] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x14);
                              auVar721._4_4_ = uVar211;
                              auVar721._0_4_ = uVar211;
                              auVar721._8_4_ = uVar211;
                              auVar721._12_4_ = uVar211;
                              auVar721._16_4_ = uVar211;
                              auVar721._20_4_ = uVar211;
                              auVar721._24_4_ = uVar211;
                              auVar721._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x14);
                              auVar989._4_4_ = uVar211;
                              auVar989._0_4_ = uVar211;
                              auVar989._8_4_ = uVar211;
                              auVar989._12_4_ = uVar211;
                              auVar989._16_4_ = uVar211;
                              auVar989._20_4_ = uVar211;
                              auVar989._24_4_ = uVar211;
                              auVar989._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[2] + lVar256 * 4),auVar577,
                                                         auVar376);
                              auVar268 = vfmadd213ps_fma(auVar577,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[2] + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar721,auVar1215);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar131,auVar721);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x18);
                              auVar722._4_4_ = uVar211;
                              auVar722._0_4_ = uVar211;
                              auVar722._8_4_ = uVar211;
                              auVar722._12_4_ = uVar211;
                              auVar722._16_4_ = uVar211;
                              auVar722._20_4_ = uVar211;
                              auVar722._24_4_ = uVar211;
                              auVar722._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar722,auVar1115);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar920,auVar52);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar722,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1116,auVar920);
                              uVar211 = *(undefined4 *)(lVar208 + 0x14 + lVar256);
                              auVar1042._4_4_ = uVar211;
                              auVar1042._0_4_ = uVar211;
                              auVar1042._8_4_ = uVar211;
                              auVar1042._12_4_ = uVar211;
                              auVar1042._16_4_ = uVar211;
                              auVar1042._20_4_ = uVar211;
                              auVar1042._24_4_ = uVar211;
                              auVar1042._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar989,auVar1117);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar989);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x18);
                              auVar921._4_4_ = uVar211;
                              auVar921._0_4_ = uVar211;
                              auVar921._8_4_ = uVar211;
                              auVar921._12_4_ = uVar211;
                              auVar921._16_4_ = uVar211;
                              auVar921._20_4_ = uVar211;
                              auVar921._24_4_ = uVar211;
                              auVar921._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar921,auVar1118);
                              auVar93._12_4_ = uStack_b34;
                              auVar93._0_12_ = auVar150;
                              auVar93._16_4_ = uStack_b30;
                              auVar93._20_4_ = uStack_b2c;
                              auVar93._24_4_ = uStack_b28;
                              auVar93._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar837,auVar93);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar921,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1114,auVar837);
                              uVar211 = *(undefined4 *)(lVar208 + 0x18 + lVar256);
                              auVar838._4_4_ = uVar211;
                              auVar838._0_4_ = uVar211;
                              auVar838._8_4_ = uVar211;
                              auVar838._12_4_ = uVar211;
                              auVar838._16_4_ = uVar211;
                              auVar838._20_4_ = uVar211;
                              auVar838._24_4_ = uVar211;
                              auVar838._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1042,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar838,auVar594);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar1042);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar838,local_880);
                              *(undefined1 (*) [32])(pauVar212[2] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[2] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x1c);
                              auVar475._4_4_ = uVar211;
                              auVar475._0_4_ = uVar211;
                              auVar475._8_4_ = uVar211;
                              auVar475._12_4_ = uVar211;
                              auVar475._16_4_ = uVar211;
                              auVar475._20_4_ = uVar211;
                              auVar475._24_4_ = uVar211;
                              auVar475._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x1c);
                              auVar990._4_4_ = uVar211;
                              auVar990._0_4_ = uVar211;
                              auVar990._8_4_ = uVar211;
                              auVar990._12_4_ = uVar211;
                              auVar990._16_4_ = uVar211;
                              auVar990._20_4_ = uVar211;
                              auVar990._24_4_ = uVar211;
                              auVar990._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[3] + lVar256 * 4),auVar722,
                                                         auVar64);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar475,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar722,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[3] + lVar256 * 4));
                              auVar132._12_4_ = uStack_ad4;
                              auVar132._0_12_ = auVar151;
                              auVar132._16_4_ = uStack_ad0;
                              auVar132._20_4_ = uStack_acc;
                              auVar132._24_4_ = uStack_ac8;
                              auVar132._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar475,auVar132);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x20);
                              auVar476._4_4_ = uVar211;
                              auVar476._0_4_ = uVar211;
                              auVar476._8_4_ = uVar211;
                              auVar476._12_4_ = uVar211;
                              auVar476._16_4_ = uVar211;
                              auVar476._20_4_ = uVar211;
                              auVar476._24_4_ = uVar211;
                              auVar476._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar476,auVar65);
                              auVar53._12_4_ = uStack_b74;
                              auVar53._0_12_ = auVar152;
                              auVar53._16_4_ = uStack_b70;
                              auVar53._20_4_ = uStack_b6c;
                              auVar53._24_4_ = uStack_b68;
                              auVar53._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar921,auVar53);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar476,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1116,auVar921);
                              uVar211 = *(undefined4 *)(lVar208 + 0x1c + lVar256);
                              auVar1043._4_4_ = uVar211;
                              auVar1043._0_4_ = uVar211;
                              auVar1043._8_4_ = uVar211;
                              auVar1043._12_4_ = uVar211;
                              auVar1043._16_4_ = uVar211;
                              auVar1043._20_4_ = uVar211;
                              auVar1043._24_4_ = uVar211;
                              auVar1043._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar990,auVar1117);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar990);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x20);
                              auVar922._4_4_ = uVar211;
                              auVar922._0_4_ = uVar211;
                              auVar922._8_4_ = uVar211;
                              auVar922._12_4_ = uVar211;
                              auVar922._16_4_ = uVar211;
                              auVar922._20_4_ = uVar211;
                              auVar922._24_4_ = uVar211;
                              auVar922._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar922,auVar66);
                              auVar94._12_4_ = uStack_b34;
                              auVar94._0_12_ = auVar153;
                              auVar94._16_4_ = uStack_b30;
                              auVar94._20_4_ = uStack_b2c;
                              auVar94._24_4_ = uStack_b28;
                              auVar94._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar838,auVar94);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar922,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar838,auVar104);
                              uVar211 = *(undefined4 *)(lVar208 + 0x20 + lVar256);
                              auVar839._4_4_ = uVar211;
                              auVar839._0_4_ = uVar211;
                              auVar839._8_4_ = uVar211;
                              auVar839._12_4_ = uVar211;
                              auVar839._16_4_ = uVar211;
                              auVar839._20_4_ = uVar211;
                              auVar839._24_4_ = uVar211;
                              auVar839._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1043,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar839,auVar105);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar1043);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar839,local_880);
                              *(undefined1 (*) [32])(pauVar212[3] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[3] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x24);
                              auVar578._4_4_ = uVar211;
                              auVar578._0_4_ = uVar211;
                              auVar578._8_4_ = uVar211;
                              auVar578._12_4_ = uVar211;
                              auVar578._16_4_ = uVar211;
                              auVar578._20_4_ = uVar211;
                              auVar578._24_4_ = uVar211;
                              auVar578._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x24);
                              auVar723._4_4_ = uVar211;
                              auVar723._0_4_ = uVar211;
                              auVar723._8_4_ = uVar211;
                              auVar723._12_4_ = uVar211;
                              auVar723._16_4_ = uVar211;
                              auVar723._20_4_ = uVar211;
                              auVar723._24_4_ = uVar211;
                              auVar723._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[4] + lVar256 * 4),auVar476,
                                                         auVar64);
                              auVar268 = vfmadd213ps_fma(auVar476,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[4] + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar578,auVar1215);
                              auVar133._12_4_ = uStack_ad4;
                              auVar133._0_12_ = auVar154;
                              auVar133._16_4_ = uStack_ad0;
                              auVar133._20_4_ = uStack_acc;
                              auVar133._24_4_ = uStack_ac8;
                              auVar133._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar133,auVar578);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x28);
                              auVar579._4_4_ = uVar211;
                              auVar579._0_4_ = uVar211;
                              auVar579._8_4_ = uVar211;
                              auVar579._12_4_ = uVar211;
                              auVar579._16_4_ = uVar211;
                              auVar579._20_4_ = uVar211;
                              auVar579._24_4_ = uVar211;
                              auVar579._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar579,auVar65);
                              auVar54._12_4_ = uStack_b74;
                              auVar54._0_12_ = auVar155;
                              auVar54._16_4_ = uStack_b70;
                              auVar54._20_4_ = uStack_b6c;
                              auVar54._24_4_ = uStack_b68;
                              auVar54._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar922,auVar54);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar579,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar922,auVar142);
                              uVar211 = *(undefined4 *)(lVar208 + 0x24 + lVar256);
                              auVar1044._4_4_ = uVar211;
                              auVar1044._0_4_ = uVar211;
                              auVar1044._8_4_ = uVar211;
                              auVar1044._12_4_ = uVar211;
                              auVar1044._16_4_ = uVar211;
                              auVar1044._20_4_ = uVar211;
                              auVar1044._24_4_ = uVar211;
                              auVar1044._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar723,auVar143);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar723);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x28);
                              auVar923._4_4_ = uVar211;
                              auVar923._0_4_ = uVar211;
                              auVar923._8_4_ = uVar211;
                              auVar923._12_4_ = uVar211;
                              auVar923._16_4_ = uVar211;
                              auVar923._20_4_ = uVar211;
                              auVar923._24_4_ = uVar211;
                              auVar923._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar923,auVar66);
                              auVar95._12_4_ = uStack_b34;
                              auVar95._0_12_ = auVar156;
                              auVar95._16_4_ = uStack_b30;
                              auVar95._20_4_ = uStack_b2c;
                              auVar95._24_4_ = uStack_b28;
                              auVar95._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar839,auVar95);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar923,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar381,auVar839);
                              uVar211 = *(undefined4 *)(lVar208 + 0x28 + lVar256);
                              auVar724._4_4_ = uVar211;
                              auVar724._0_4_ = uVar211;
                              auVar724._8_4_ = uVar211;
                              auVar724._12_4_ = uVar211;
                              auVar724._16_4_ = uVar211;
                              auVar724._20_4_ = uVar211;
                              auVar724._24_4_ = uVar211;
                              auVar724._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1044,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar724,auVar484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1044,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar724,local_880);
                              *(undefined1 (*) [32])(pauVar212[4] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[4] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x2c);
                              auVar477._4_4_ = uVar211;
                              auVar477._0_4_ = uVar211;
                              auVar477._8_4_ = uVar211;
                              auVar477._12_4_ = uVar211;
                              auVar477._16_4_ = uVar211;
                              auVar477._20_4_ = uVar211;
                              auVar477._24_4_ = uVar211;
                              auVar477._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x2c);
                              auVar840._4_4_ = uVar211;
                              auVar840._0_4_ = uVar211;
                              auVar840._8_4_ = uVar211;
                              auVar840._12_4_ = uVar211;
                              auVar840._16_4_ = uVar211;
                              auVar840._20_4_ = uVar211;
                              auVar840._24_4_ = uVar211;
                              auVar840._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[5] + lVar256 * 4),auVar579,
                                                         auVar64);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar477,auVar1215);
                              auVar268 = vfmadd213ps_fma(auVar579,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[5] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar133,auVar477);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x30);
                              auVar478._4_4_ = uVar211;
                              auVar478._0_4_ = uVar211;
                              auVar478._8_4_ = uVar211;
                              auVar478._12_4_ = uVar211;
                              auVar478._16_4_ = uVar211;
                              auVar478._20_4_ = uVar211;
                              auVar478._24_4_ = uVar211;
                              auVar478._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar478,auVar742);
                              auVar55._12_4_ = uStack_b74;
                              auVar55._0_12_ = auVar157;
                              auVar55._16_4_ = uStack_b70;
                              auVar55._20_4_ = uStack_b6c;
                              auVar55._24_4_ = uStack_b68;
                              auVar55._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar923,auVar55);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar478,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar856,auVar923);
                              uVar211 = *(undefined4 *)(lVar208 + 0x2c + lVar256);
                              auVar924._4_4_ = uVar211;
                              auVar924._0_4_ = uVar211;
                              auVar924._8_4_ = uVar211;
                              auVar924._12_4_ = uVar211;
                              auVar924._16_4_ = uVar211;
                              auVar924._20_4_ = uVar211;
                              auVar924._24_4_ = uVar211;
                              auVar924._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar840,auVar1109);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar840,_local_9c0);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x30);
                              auVar841._4_4_ = uVar211;
                              auVar841._0_4_ = uVar211;
                              auVar841._8_4_ = uVar211;
                              auVar841._12_4_ = uVar211;
                              auVar841._16_4_ = uVar211;
                              auVar841._20_4_ = uVar211;
                              auVar841._24_4_ = uVar211;
                              auVar841._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar841,auVar1182);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar724,auVar95);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar841,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar381,auVar724);
                              uVar211 = *(undefined4 *)(lVar208 + 0x30 + lVar256);
                              auVar725._4_4_ = uVar211;
                              auVar725._0_4_ = uVar211;
                              auVar725._8_4_ = uVar211;
                              auVar725._12_4_ = uVar211;
                              auVar725._16_4_ = uVar211;
                              auVar725._20_4_ = uVar211;
                              auVar725._24_4_ = uVar211;
                              auVar725._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar924,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar725,auVar484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar924);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar725,local_880);
                              *(undefined1 (*) [32])(pauVar212[5] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[5] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x34);
                              auVar580._4_4_ = uVar211;
                              auVar580._0_4_ = uVar211;
                              auVar580._8_4_ = uVar211;
                              auVar580._12_4_ = uVar211;
                              auVar580._16_4_ = uVar211;
                              auVar580._20_4_ = uVar211;
                              auVar580._24_4_ = uVar211;
                              auVar580._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x34);
                              auVar991._4_4_ = uVar211;
                              auVar991._0_4_ = uVar211;
                              auVar991._8_4_ = uVar211;
                              auVar991._12_4_ = uVar211;
                              auVar991._16_4_ = uVar211;
                              auVar991._20_4_ = uVar211;
                              auVar991._24_4_ = uVar211;
                              auVar991._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[6] + lVar256 * 4),auVar478,
                                                         auVar64);
                              auVar268 = vfmadd213ps_fma(auVar478,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[6] + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar580,auVar1183);
                              auVar134._12_4_ = uStack_ad4;
                              auVar134._0_12_ = auVar158;
                              auVar134._16_4_ = uStack_ad0;
                              auVar134._20_4_ = uStack_acc;
                              auVar134._24_4_ = uStack_ac8;
                              auVar134._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar580,auVar134);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x38);
                              auVar581._4_4_ = uVar211;
                              auVar581._0_4_ = uVar211;
                              auVar581._8_4_ = uVar211;
                              auVar581._12_4_ = uVar211;
                              auVar581._16_4_ = uVar211;
                              auVar581._20_4_ = uVar211;
                              auVar581._24_4_ = uVar211;
                              auVar581._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar581,auVar1346);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar841,auVar55);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar581,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar856,auVar841);
                              uVar211 = *(undefined4 *)(lVar208 + 0x34 + lVar256);
                              auVar1045._4_4_ = uVar211;
                              auVar1045._0_4_ = uVar211;
                              auVar1045._8_4_ = uVar211;
                              auVar1045._12_4_ = uVar211;
                              auVar1045._16_4_ = uVar211;
                              auVar1045._20_4_ = uVar211;
                              auVar1045._24_4_ = uVar211;
                              auVar1045._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar991,auVar1109);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar991);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x38);
                              auVar842._4_4_ = uVar211;
                              auVar842._0_4_ = uVar211;
                              auVar842._8_4_ = uVar211;
                              auVar842._12_4_ = uVar211;
                              auVar842._16_4_ = uVar211;
                              auVar842._20_4_ = uVar211;
                              auVar842._24_4_ = uVar211;
                              auVar842._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar842,auVar1424);
                              auVar96._12_4_ = uStack_b34;
                              auVar96._0_12_ = auVar159;
                              auVar96._16_4_ = uStack_b30;
                              auVar96._20_4_ = uStack_b2c;
                              auVar96._24_4_ = uStack_b28;
                              auVar96._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar725,auVar96);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar842,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar725,auVar1425);
                              uVar211 = *(undefined4 *)(lVar208 + 0x38 + lVar256);
                              auVar726._4_4_ = uVar211;
                              auVar726._0_4_ = uVar211;
                              auVar726._8_4_ = uVar211;
                              auVar726._12_4_ = uVar211;
                              auVar726._16_4_ = uVar211;
                              auVar726._20_4_ = uVar211;
                              auVar726._24_4_ = uVar211;
                              auVar726._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1045,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar726,auVar484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar1045);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar726,local_880);
                              *(undefined1 (*) [32])(pauVar212[6] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[6] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x3c);
                              auVar925._4_4_ = uVar211;
                              auVar925._0_4_ = uVar211;
                              auVar925._8_4_ = uVar211;
                              auVar925._12_4_ = uVar211;
                              auVar925._16_4_ = uVar211;
                              auVar925._20_4_ = uVar211;
                              auVar925._24_4_ = uVar211;
                              auVar925._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x40);
                              auVar992._4_4_ = uVar211;
                              auVar992._0_4_ = uVar211;
                              auVar992._8_4_ = uVar211;
                              auVar992._12_4_ = uVar211;
                              auVar992._16_4_ = uVar211;
                              auVar992._20_4_ = uVar211;
                              auVar992._24_4_ = uVar211;
                              auVar992._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[7] + lVar256 * 4),auVar581,
                                                         auVar1482);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar925,auVar1183);
                              auVar268 = vfmadd213ps_fma(auVar581,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[7] + lVar256 * 4));
                              auVar135._12_4_ = uStack_ad4;
                              auVar135._0_12_ = auVar160;
                              auVar135._16_4_ = uStack_ad0;
                              auVar135._20_4_ = uStack_acc;
                              auVar135._24_4_ = uStack_ac8;
                              auVar135._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar925,auVar135);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar992,auVar1346);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar992);
                              auVar56._12_4_ = uStack_b74;
                              auVar56._0_12_ = auVar161;
                              auVar56._16_4_ = uStack_b70;
                              auVar56._20_4_ = uStack_b6c;
                              auVar56._24_4_ = uStack_b68;
                              auVar56._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar842,auVar56);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar842,auVar1500);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x3c);
                              auVar843._4_4_ = uVar211;
                              auVar843._0_4_ = uVar211;
                              auVar843._8_4_ = uVar211;
                              auVar843._12_4_ = uVar211;
                              auVar843._16_4_ = uVar211;
                              auVar843._20_4_ = uVar211;
                              auVar843._24_4_ = uVar211;
                              auVar843._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar843,auVar1501);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar843);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x40);
                              auVar844._4_4_ = uVar211;
                              auVar844._0_4_ = uVar211;
                              auVar844._8_4_ = uVar211;
                              auVar844._12_4_ = uVar211;
                              auVar844._16_4_ = uVar211;
                              auVar844._20_4_ = uVar211;
                              auVar844._24_4_ = uVar211;
                              auVar844._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar844,auVar1424);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_7c0,auVar844);
                              uVar211 = *(undefined4 *)(lVar208 + 0x3c + lVar256);
                              auVar845._4_4_ = uVar211;
                              auVar845._0_4_ = uVar211;
                              auVar845._8_4_ = uVar211;
                              auVar845._12_4_ = uVar211;
                              auVar845._16_4_ = uVar211;
                              auVar845._20_4_ = uVar211;
                              auVar845._24_4_ = uVar211;
                              auVar845._28_4_ = uVar211;
                              auVar97._12_4_ = uStack_b34;
                              auVar97._0_12_ = auVar162;
                              auVar97._16_4_ = uStack_b30;
                              auVar97._20_4_ = uStack_b2c;
                              auVar97._24_4_ = uStack_b28;
                              auVar97._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar726,auVar97);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar726,auVar67);
                              uVar211 = *(undefined4 *)(lVar208 + 0x40 + lVar256);
                              auVar727._4_4_ = uVar211;
                              auVar727._0_4_ = uVar211;
                              auVar727._8_4_ = uVar211;
                              auVar727._12_4_ = uVar211;
                              auVar727._16_4_ = uVar211;
                              auVar727._20_4_ = uVar211;
                              auVar727._24_4_ = uVar211;
                              auVar727._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar845,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar845);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar727,auVar484);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar727);
                              *(undefined1 (*) [32])(pauVar212[7] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[7] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar235 = pauVar235 + 8;
                              pauVar241 = pauVar241 + 8;
                              lVar256 = lVar256 + 0x40;
                              piVar227 = piVar227 + 0x10;
                              piVar223 = piVar223 + 0x10;
                              lVar234 = lVar234 + 0x40;
                            }
                            for (; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar582._4_4_ = uVar211;
                              auVar582._0_4_ = uVar211;
                              auVar582._8_4_ = uVar211;
                              auVar582._12_4_ = uVar211;
                              auVar582._16_4_ = uVar211;
                              auVar582._20_4_ = uVar211;
                              auVar582._24_4_ = uVar211;
                              auVar582._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar728._4_4_ = uVar211;
                              auVar728._0_4_ = uVar211;
                              auVar728._8_4_ = uVar211;
                              auVar728._12_4_ = uVar211;
                              auVar728._16_4_ = uVar211;
                              auVar728._20_4_ = uVar211;
                              auVar728._24_4_ = uVar211;
                              auVar728._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar479._4_4_ = uVar211;
                              auVar479._0_4_ = uVar211;
                              auVar479._8_4_ = uVar211;
                              auVar479._12_4_ = uVar211;
                              auVar479._16_4_ = uVar211;
                              auVar479._20_4_ = uVar211;
                              auVar479._24_4_ = uVar211;
                              auVar479._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar993._4_4_ = uVar211;
                              auVar993._0_4_ = uVar211;
                              auVar993._8_4_ = uVar211;
                              auVar993._12_4_ = uVar211;
                              auVar993._16_4_ = uVar211;
                              auVar993._20_4_ = uVar211;
                              auVar993._24_4_ = uVar211;
                              auVar993._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar846._4_4_ = uVar211;
                              auVar846._0_4_ = uVar211;
                              auVar846._8_4_ = uVar211;
                              auVar846._12_4_ = uVar211;
                              auVar846._16_4_ = uVar211;
                              auVar846._20_4_ = uVar211;
                              auVar846._24_4_ = uVar211;
                              auVar846._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (*pauVar212 + lVar256 * 4),auVar582,
                                                         auVar106);
                              auVar268 = vfmadd213ps_fma(auVar582,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar195 + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar728,auVar144);
                              auVar136._12_4_ = uStack_ad4;
                              auVar136._0_12_ = auVar163;
                              auVar136._16_4_ = uStack_ad0;
                              auVar136._20_4_ = uStack_acc;
                              auVar136._24_4_ = uStack_ac8;
                              auVar136._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar136,auVar728);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar729._4_4_ = uVar211;
                              auVar729._0_4_ = uVar211;
                              auVar729._8_4_ = uVar211;
                              auVar729._12_4_ = uVar211;
                              auVar729._16_4_ = uVar211;
                              auVar729._20_4_ = uVar211;
                              auVar729._24_4_ = uVar211;
                              auVar729._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar479,auVar382);
                              auVar57._12_4_ = uStack_b74;
                              auVar57._0_12_ = auVar164;
                              auVar57._16_4_ = uStack_b70;
                              auVar57._20_4_ = uStack_b6c;
                              auVar57._24_4_ = uStack_b68;
                              auVar57._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar993,auVar57);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar479,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar485,auVar993);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar994._4_4_ = uVar211;
                              auVar994._0_4_ = uVar211;
                              auVar994._8_4_ = uVar211;
                              auVar994._12_4_ = uVar211;
                              auVar994._16_4_ = uVar211;
                              auVar994._20_4_ = uVar211;
                              auVar994._24_4_ = uVar211;
                              auVar994._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar846,auVar45);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar846,_local_9c0);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1046._4_4_ = uVar211;
                              auVar1046._0_4_ = uVar211;
                              auVar1046._8_4_ = uVar211;
                              auVar1046._12_4_ = uVar211;
                              auVar1046._16_4_ = uVar211;
                              auVar1046._20_4_ = uVar211;
                              auVar1046._24_4_ = uVar211;
                              auVar1046._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar729,auVar46);
                              auVar98._12_4_ = uStack_b34;
                              auVar98._0_12_ = auVar165;
                              auVar98._16_4_ = uStack_b30;
                              auVar98._20_4_ = uStack_b2c;
                              auVar98._24_4_ = uStack_b28;
                              auVar98._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar994,auVar98);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar729,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar47,auVar994);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar847._4_4_ = uVar211;
                              auVar847._0_4_ = uVar211;
                              auVar847._8_4_ = uVar211;
                              auVar847._12_4_ = uVar211;
                              auVar847._16_4_ = uVar211;
                              auVar847._20_4_ = uVar211;
                              auVar847._24_4_ = uVar211;
                              auVar847._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1046,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar847,auVar86);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1046,local_980);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar847,local_880);
                              *(undefined1 (*) [32])(*pauVar212 + lVar256 * 4) = ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(*pauVar195 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar583._4_4_ = uVar211;
                              auVar583._0_4_ = uVar211;
                              auVar583._8_4_ = uVar211;
                              auVar583._12_4_ = uVar211;
                              auVar583._16_4_ = uVar211;
                              auVar583._20_4_ = uVar211;
                              auVar583._24_4_ = uVar211;
                              auVar583._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar926._4_4_ = uVar211;
                              auVar926._0_4_ = uVar211;
                              auVar926._8_4_ = uVar211;
                              auVar926._12_4_ = uVar211;
                              auVar926._16_4_ = uVar211;
                              auVar926._20_4_ = uVar211;
                              auVar926._24_4_ = uVar211;
                              auVar926._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[1] + lVar256 * 4),auVar479,
                                                         auVar106);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar583,auVar144);
                              auVar268 = vfmadd213ps_fma(auVar479,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[1] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar136,auVar583);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar584._4_4_ = uVar211;
                              auVar584._0_4_ = uVar211;
                              auVar584._8_4_ = uVar211;
                              auVar584._12_4_ = uVar211;
                              auVar584._16_4_ = uVar211;
                              auVar584._20_4_ = uVar211;
                              auVar584._24_4_ = uVar211;
                              auVar584._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar584,auVar87);
                              auVar58._12_4_ = uStack_b74;
                              auVar58._0_12_ = auVar166;
                              auVar58._16_4_ = uStack_b70;
                              auVar58._20_4_ = uStack_b6c;
                              auVar58._24_4_ = uStack_b68;
                              auVar58._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar729,auVar58);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar584,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar485,auVar729);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar1047._4_4_ = uVar211;
                              auVar1047._0_4_ = uVar211;
                              auVar1047._8_4_ = uVar211;
                              auVar1047._12_4_ = uVar211;
                              auVar1047._16_4_ = uVar211;
                              auVar1047._20_4_ = uVar211;
                              auVar1047._24_4_ = uVar211;
                              auVar1047._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar926,auVar45);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar926);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar927._4_4_ = uVar211;
                              auVar927._0_4_ = uVar211;
                              auVar927._8_4_ = uVar211;
                              auVar927._12_4_ = uVar211;
                              auVar927._16_4_ = uVar211;
                              auVar927._20_4_ = uVar211;
                              auVar927._24_4_ = uVar211;
                              auVar927._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar927,auVar88);
                              auVar99._12_4_ = uStack_b34;
                              auVar99._0_12_ = auVar167;
                              auVar99._16_4_ = uStack_b30;
                              auVar99._20_4_ = uStack_b2c;
                              auVar99._24_4_ = uStack_b28;
                              auVar99._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar847,auVar99);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar927,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar47,auVar847);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar730._4_4_ = uVar211;
                              auVar730._0_4_ = uVar211;
                              auVar730._8_4_ = uVar211;
                              auVar730._12_4_ = uVar211;
                              auVar730._16_4_ = uVar211;
                              auVar730._20_4_ = uVar211;
                              auVar730._24_4_ = uVar211;
                              auVar730._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1047,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar730,auVar86);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar1047);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar730,local_880);
                              *(undefined1 (*) [32])(pauVar212[1] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x14);
                              auVar480._4_4_ = uVar211;
                              auVar480._0_4_ = uVar211;
                              auVar480._8_4_ = uVar211;
                              auVar480._12_4_ = uVar211;
                              auVar480._16_4_ = uVar211;
                              auVar480._20_4_ = uVar211;
                              auVar480._24_4_ = uVar211;
                              auVar480._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x14);
                              auVar848._4_4_ = uVar211;
                              auVar848._0_4_ = uVar211;
                              auVar848._8_4_ = uVar211;
                              auVar848._12_4_ = uVar211;
                              auVar848._16_4_ = uVar211;
                              auVar848._20_4_ = uVar211;
                              auVar848._24_4_ = uVar211;
                              auVar848._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[2] + lVar256 * 4),auVar584,
                                                         auVar124);
                              auVar268 = vfmadd213ps_fma(auVar584,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[2] + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar480,auVar125);
                              auVar137._12_4_ = uStack_ad4;
                              auVar137._0_12_ = auVar168;
                              auVar137._16_4_ = uStack_ad0;
                              auVar137._20_4_ = uStack_acc;
                              auVar137._24_4_ = uStack_ac8;
                              auVar137._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar480,auVar137);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x18);
                              auVar481._4_4_ = uVar211;
                              auVar481._0_4_ = uVar211;
                              auVar481._8_4_ = uVar211;
                              auVar481._12_4_ = uVar211;
                              auVar481._16_4_ = uVar211;
                              auVar481._20_4_ = uVar211;
                              auVar481._24_4_ = uVar211;
                              auVar481._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar481,auVar87);
                              auVar59._12_4_ = uStack_b74;
                              auVar59._0_12_ = auVar169;
                              auVar59._16_4_ = uStack_b70;
                              auVar59._20_4_ = uStack_b6c;
                              auVar59._24_4_ = uStack_b68;
                              auVar59._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar927,auVar59);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar481,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar927,auVar126);
                              uVar211 = *(undefined4 *)(lVar208 + 0x14 + lVar256);
                              auVar928._4_4_ = uVar211;
                              auVar928._0_4_ = uVar211;
                              auVar928._8_4_ = uVar211;
                              auVar928._12_4_ = uVar211;
                              auVar928._16_4_ = uVar211;
                              auVar928._20_4_ = uVar211;
                              auVar928._24_4_ = uVar211;
                              auVar928._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar848,auVar457);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar848);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x18);
                              auVar849._4_4_ = uVar211;
                              auVar849._0_4_ = uVar211;
                              auVar849._8_4_ = uVar211;
                              auVar849._12_4_ = uVar211;
                              auVar849._16_4_ = uVar211;
                              auVar849._20_4_ = uVar211;
                              auVar849._24_4_ = uVar211;
                              auVar849._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar849,auVar88);
                              auVar100._12_4_ = uStack_b34;
                              auVar100._0_12_ = auVar170;
                              auVar100._16_4_ = uStack_b30;
                              auVar100._20_4_ = uStack_b2c;
                              auVar100._24_4_ = uStack_b28;
                              auVar100._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar730,auVar100);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar849,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar561,auVar730);
                              uVar211 = *(undefined4 *)(lVar208 + 0x18 + lVar256);
                              auVar731._4_4_ = uVar211;
                              auVar731._0_4_ = uVar211;
                              auVar731._8_4_ = uVar211;
                              auVar731._12_4_ = uVar211;
                              auVar731._16_4_ = uVar211;
                              auVar731._20_4_ = uVar211;
                              auVar731._24_4_ = uVar211;
                              auVar731._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar928,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar731,auVar86);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar928);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar731,local_880);
                              *(undefined1 (*) [32])(pauVar212[2] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[2] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x1c);
                              auVar929._4_4_ = uVar211;
                              auVar929._0_4_ = uVar211;
                              auVar929._8_4_ = uVar211;
                              auVar929._12_4_ = uVar211;
                              auVar929._16_4_ = uVar211;
                              auVar929._20_4_ = uVar211;
                              auVar929._24_4_ = uVar211;
                              auVar929._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x20);
                              auVar995._4_4_ = uVar211;
                              auVar995._0_4_ = uVar211;
                              auVar995._8_4_ = uVar211;
                              auVar995._12_4_ = uVar211;
                              auVar995._16_4_ = uVar211;
                              auVar995._20_4_ = uVar211;
                              auVar995._24_4_ = uVar211;
                              auVar995._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[3] + lVar256 * 4),auVar481,
                                                         auVar124);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar929,auVar125);
                              auVar268 = vfmadd213ps_fma(auVar481,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[3] + lVar256 * 4));
                              auVar138._12_4_ = uStack_ad4;
                              auVar138._0_12_ = auVar171;
                              auVar138._16_4_ = uStack_ad0;
                              auVar138._20_4_ = uStack_acc;
                              auVar138._24_4_ = uStack_ac8;
                              auVar138._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar929,auVar138);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar995,auVar562);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar995);
                              auVar60._12_4_ = uStack_b74;
                              auVar60._0_12_ = auVar172;
                              auVar60._16_4_ = uStack_b70;
                              auVar60._20_4_ = uStack_b6c;
                              auVar60._24_4_ = uStack_b68;
                              auVar60._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar849,auVar60);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar849,auVar698);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x1c);
                              auVar850._4_4_ = uVar211;
                              auVar850._0_4_ = uVar211;
                              auVar850._8_4_ = uVar211;
                              auVar850._12_4_ = uVar211;
                              auVar850._16_4_ = uVar211;
                              auVar850._20_4_ = uVar211;
                              auVar850._24_4_ = uVar211;
                              auVar850._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar850,auVar699);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar850,_local_9c0);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x20);
                              auVar851._4_4_ = uVar211;
                              auVar851._0_4_ = uVar211;
                              auVar851._8_4_ = uVar211;
                              auVar851._12_4_ = uVar211;
                              auVar851._16_4_ = uVar211;
                              auVar851._20_4_ = uVar211;
                              auVar851._24_4_ = uVar211;
                              auVar851._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar851,auVar700);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_7c0,auVar851);
                              uVar211 = *(undefined4 *)(lVar208 + 0x1c + lVar256);
                              auVar852._4_4_ = uVar211;
                              auVar852._0_4_ = uVar211;
                              auVar852._8_4_ = uVar211;
                              auVar852._12_4_ = uVar211;
                              auVar852._16_4_ = uVar211;
                              auVar852._20_4_ = uVar211;
                              auVar852._24_4_ = uVar211;
                              auVar852._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar731,auVar100);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar561,auVar731);
                              uVar211 = *(undefined4 *)(lVar208 + 0x20 + lVar256);
                              auVar732._4_4_ = uVar211;
                              auVar732._0_4_ = uVar211;
                              auVar732._8_4_ = uVar211;
                              auVar732._12_4_ = uVar211;
                              auVar732._16_4_ = uVar211;
                              auVar732._20_4_ = uVar211;
                              auVar732._24_4_ = uVar211;
                              auVar732._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar852,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar852);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar732,auVar86);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar732);
                              *(undefined1 (*) [32])(pauVar212[3] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[3] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar235 = pauVar235 + 4;
                              pauVar241 = pauVar241 + 4;
                              lVar256 = lVar256 + 0x20;
                              piVar227 = piVar227 + 8;
                              piVar223 = piVar223 + 8;
                              lVar234 = lVar234 + 0x20;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar733._4_4_ = uVar211;
                              auVar733._0_4_ = uVar211;
                              auVar733._8_4_ = uVar211;
                              auVar733._12_4_ = uVar211;
                              auVar733._16_4_ = uVar211;
                              auVar733._20_4_ = uVar211;
                              auVar733._24_4_ = uVar211;
                              auVar733._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar585._4_4_ = uVar211;
                              auVar585._0_4_ = uVar211;
                              auVar585._8_4_ = uVar211;
                              auVar585._12_4_ = uVar211;
                              auVar585._16_4_ = uVar211;
                              auVar585._20_4_ = uVar211;
                              auVar585._24_4_ = uVar211;
                              auVar585._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar482._4_4_ = uVar211;
                              auVar482._0_4_ = uVar211;
                              auVar482._8_4_ = uVar211;
                              auVar482._12_4_ = uVar211;
                              auVar482._16_4_ = uVar211;
                              auVar482._20_4_ = uVar211;
                              auVar482._24_4_ = uVar211;
                              auVar482._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar996._4_4_ = uVar211;
                              auVar996._0_4_ = uVar211;
                              auVar996._8_4_ = uVar211;
                              auVar996._12_4_ = uVar211;
                              auVar996._16_4_ = uVar211;
                              auVar996._20_4_ = uVar211;
                              auVar996._24_4_ = uVar211;
                              auVar996._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar853._4_4_ = uVar211;
                              auVar853._0_4_ = uVar211;
                              auVar853._8_4_ = uVar211;
                              auVar853._12_4_ = uVar211;
                              auVar853._16_4_ = uVar211;
                              auVar853._20_4_ = uVar211;
                              auVar853._24_4_ = uVar211;
                              auVar853._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (*pauVar212 + lVar256 * 4),auVar733,
                                                         auVar823);
                              auVar268 = vfmadd213ps_fma(auVar733,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar195 + lVar256 * 4));
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar585,auVar824);
                              auVar139._12_4_ = uStack_ad4;
                              auVar139._0_12_ = auVar173;
                              auVar139._16_4_ = uStack_ad0;
                              auVar139._20_4_ = uStack_acc;
                              auVar139._24_4_ = uStack_ac8;
                              auVar139._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar585,auVar139);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar586._4_4_ = uVar211;
                              auVar586._0_4_ = uVar211;
                              auVar586._8_4_ = uVar211;
                              auVar586._12_4_ = uVar211;
                              auVar586._16_4_ = uVar211;
                              auVar586._20_4_ = uVar211;
                              auVar586._24_4_ = uVar211;
                              auVar586._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar482,auVar909);
                              auVar61._12_4_ = uStack_b74;
                              auVar61._0_12_ = auVar174;
                              auVar61._16_4_ = uStack_b70;
                              auVar61._20_4_ = uStack_b6c;
                              auVar61._24_4_ = uStack_b68;
                              auVar61._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar996,auVar61);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar482,local_960);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar910,auVar996);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar997._4_4_ = uVar211;
                              auVar997._0_4_ = uVar211;
                              auVar997._8_4_ = uVar211;
                              auVar997._12_4_ = uVar211;
                              auVar997._16_4_ = uVar211;
                              auVar997._20_4_ = uVar211;
                              auVar997._24_4_ = uVar211;
                              auVar997._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar853,auVar911);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar853);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1048._4_4_ = uVar211;
                              auVar1048._0_4_ = uVar211;
                              auVar1048._8_4_ = uVar211;
                              auVar1048._12_4_ = uVar211;
                              auVar1048._16_4_ = uVar211;
                              auVar1048._20_4_ = uVar211;
                              auVar1048._24_4_ = uVar211;
                              auVar1048._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar586,auVar976);
                              auVar101._12_4_ = uStack_b34;
                              auVar101._0_12_ = auVar175;
                              auVar101._16_4_ = uStack_b30;
                              auVar101._20_4_ = uStack_b2c;
                              auVar101._24_4_ = uStack_b28;
                              auVar101._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar997,auVar101);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar586,local_7c0);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar997,auVar977);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar854._4_4_ = uVar211;
                              auVar854._0_4_ = uVar211;
                              auVar854._8_4_ = uVar211;
                              auVar854._12_4_ = uVar211;
                              auVar854._16_4_ = uVar211;
                              auVar854._20_4_ = uVar211;
                              auVar854._24_4_ = uVar211;
                              auVar854._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar1048,local_a00);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar854,auVar978);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar1048);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar854,local_880);
                              *(undefined1 (*) [32])(*pauVar212 + lVar256 * 4) = ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(*pauVar195 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar930._4_4_ = uVar211;
                              auVar930._0_4_ = uVar211;
                              auVar930._8_4_ = uVar211;
                              auVar930._12_4_ = uVar211;
                              auVar930._16_4_ = uVar211;
                              auVar930._20_4_ = uVar211;
                              auVar930._24_4_ = uVar211;
                              auVar930._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar998._4_4_ = uVar211;
                              auVar998._0_4_ = uVar211;
                              auVar998._8_4_ = uVar211;
                              auVar998._12_4_ = uVar211;
                              auVar998._16_4_ = uVar211;
                              auVar998._20_4_ = uVar211;
                              auVar998._24_4_ = uVar211;
                              auVar998._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*(undefined1 (*) [32])
                                                          (pauVar212[1] + lVar256 * 4),auVar482,
                                                         auVar1032);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar930,auVar824);
                              auVar268 = vfmadd213ps_fma(auVar482,local_9a0,
                                                         *(undefined1 (*) [32])
                                                          (pauVar195[1] + lVar256 * 4));
                              auVar140._12_4_ = uStack_ad4;
                              auVar140._0_12_ = auVar176;
                              auVar140._16_4_ = uStack_ad0;
                              auVar140._20_4_ = uStack_acc;
                              auVar140._24_4_ = uStack_ac8;
                              auVar140._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar930,auVar140);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar998,auVar909);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_960,auVar998);
                              auVar62._12_4_ = uStack_b74;
                              auVar62._0_12_ = auVar177;
                              auVar62._16_4_ = uStack_b70;
                              auVar62._20_4_ = uStack_b6c;
                              auVar62._24_4_ = uStack_b68;
                              auVar62._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar586,auVar62);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar910,auVar586);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar587._4_4_ = uVar211;
                              auVar587._0_4_ = uVar211;
                              auVar587._8_4_ = uVar211;
                              auVar587._12_4_ = uVar211;
                              auVar587._16_4_ = uVar211;
                              auVar587._20_4_ = uVar211;
                              auVar587._24_4_ = uVar211;
                              auVar587._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar587,auVar911);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),_local_9c0,auVar587);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar588._4_4_ = uVar211;
                              auVar588._0_4_ = uVar211;
                              auVar588._8_4_ = uVar211;
                              auVar588._12_4_ = uVar211;
                              auVar588._16_4_ = uVar211;
                              auVar588._20_4_ = uVar211;
                              auVar588._24_4_ = uVar211;
                              auVar588._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar588,auVar976);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_7c0,auVar588);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar589._4_4_ = uVar211;
                              auVar589._0_4_ = uVar211;
                              auVar589._8_4_ = uVar211;
                              auVar589._12_4_ = uVar211;
                              auVar589._16_4_ = uVar211;
                              auVar589._20_4_ = uVar211;
                              auVar589._24_4_ = uVar211;
                              auVar589._28_4_ = uVar211;
                              auVar102._12_4_ = uStack_b34;
                              auVar102._0_12_ = auVar178;
                              auVar102._16_4_ = uStack_b30;
                              auVar102._20_4_ = uStack_b2c;
                              auVar102._24_4_ = uStack_b28;
                              auVar102._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar854,auVar102);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar854,auVar1033);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar855._4_4_ = uVar211;
                              auVar855._0_4_ = uVar211;
                              auVar855._8_4_ = uVar211;
                              auVar855._12_4_ = uVar211;
                              auVar855._16_4_ = uVar211;
                              auVar855._20_4_ = uVar211;
                              auVar855._24_4_ = uVar211;
                              auVar855._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar589,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_980,auVar589);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar855,auVar1034);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),local_880,auVar855);
                              *(undefined1 (*) [32])(pauVar212[1] + lVar256 * 4) =
                                   ZEXT1632(auVar310);
                              *(undefined1 (*) [32])(pauVar195[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar235 = pauVar235 + 2;
                              pauVar241 = pauVar241 + 2;
                              lVar256 = lVar256 + 0x10;
                              piVar227 = piVar227 + 4;
                              piVar223 = piVar223 + 4;
                              lVar234 = lVar234 + 0x10;
                            }
                            puVar254 = (undefined4 *)((long)piVar255 + lVar256);
                            puVar252 = (undefined4 *)((long)piVar222 + lVar256);
                            puVar261 = (undefined4 *)(lVar208 + lVar256);
                            pauVar212 = pauVar235;
                            pauVar195 = pauVar241;
                            piVar255 = piVar227;
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *puVar254;
                              auVar483._4_4_ = uVar211;
                              auVar483._0_4_ = uVar211;
                              auVar483._8_4_ = uVar211;
                              auVar483._12_4_ = uVar211;
                              auVar483._16_4_ = uVar211;
                              auVar483._20_4_ = uVar211;
                              auVar483._24_4_ = uVar211;
                              auVar483._28_4_ = uVar211;
                              uVar211 = puVar254[1];
                              auVar734._4_4_ = uVar211;
                              auVar734._0_4_ = uVar211;
                              auVar734._8_4_ = uVar211;
                              auVar734._12_4_ = uVar211;
                              auVar734._16_4_ = uVar211;
                              auVar734._20_4_ = uVar211;
                              auVar734._24_4_ = uVar211;
                              auVar734._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(*pauVar212,auVar483,auVar1498);
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar734,auVar48);
                              auVar268 = vfmadd213ps_fma(auVar483,local_9a0,*pauVar195);
                              auVar141._12_4_ = uStack_ad4;
                              auVar141._0_12_ = auVar179;
                              auVar141._16_4_ = uStack_ad0;
                              auVar141._20_4_ = uStack_acc;
                              auVar141._24_4_ = uStack_ac8;
                              auVar141._28_4_ = uStack_ac4;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar734,auVar141);
                              uVar211 = puVar254[2];
                              auVar735._4_4_ = uVar211;
                              auVar735._0_4_ = uVar211;
                              auVar735._8_4_ = uVar211;
                              auVar735._12_4_ = uVar211;
                              auVar735._16_4_ = uVar211;
                              auVar735._20_4_ = uVar211;
                              auVar735._24_4_ = uVar211;
                              auVar735._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar735,auVar49);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar735,local_960);
                              uVar211 = *puVar252;
                              auVar736._4_4_ = uVar211;
                              auVar736._0_4_ = uVar211;
                              auVar736._8_4_ = uVar211;
                              auVar736._12_4_ = uVar211;
                              auVar736._16_4_ = uVar211;
                              auVar736._20_4_ = uVar211;
                              auVar736._24_4_ = uVar211;
                              auVar736._28_4_ = uVar211;
                              auVar63._12_4_ = uStack_b74;
                              auVar63._0_12_ = auVar180;
                              auVar63._16_4_ = uStack_b70;
                              auVar63._20_4_ = uStack_b6c;
                              auVar63._24_4_ = uStack_b68;
                              auVar63._28_4_ = uStack_b64;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar736,auVar63);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar736,auVar89);
                              uVar211 = puVar252[1];
                              auVar737._4_4_ = uVar211;
                              auVar737._0_4_ = uVar211;
                              auVar737._8_4_ = uVar211;
                              auVar737._12_4_ = uVar211;
                              auVar737._16_4_ = uVar211;
                              auVar737._20_4_ = uVar211;
                              auVar737._24_4_ = uVar211;
                              auVar737._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar737,auVar90);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar737,_local_9c0);
                              uVar211 = puVar252[2];
                              auVar738._4_4_ = uVar211;
                              auVar738._0_4_ = uVar211;
                              auVar738._8_4_ = uVar211;
                              auVar738._12_4_ = uVar211;
                              auVar738._16_4_ = uVar211;
                              auVar738._20_4_ = uVar211;
                              auVar738._24_4_ = uVar211;
                              auVar738._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar738,auVar127);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar738,local_7c0);
                              uVar211 = *puVar261;
                              auVar739._4_4_ = uVar211;
                              auVar739._0_4_ = uVar211;
                              auVar739._8_4_ = uVar211;
                              auVar739._12_4_ = uVar211;
                              auVar739._16_4_ = uVar211;
                              auVar739._20_4_ = uVar211;
                              auVar739._24_4_ = uVar211;
                              auVar739._28_4_ = uVar211;
                              auVar103._12_4_ = uStack_b34;
                              auVar103._0_12_ = auVar181;
                              auVar103._16_4_ = uStack_b30;
                              auVar103._20_4_ = uStack_b2c;
                              auVar103._24_4_ = uStack_b28;
                              auVar103._28_4_ = uStack_b24;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar739,auVar103);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar739,auVar128);
                              uVar211 = puVar261[1];
                              auVar740._4_4_ = uVar211;
                              auVar740._0_4_ = uVar211;
                              auVar740._8_4_ = uVar211;
                              auVar740._12_4_ = uVar211;
                              auVar740._16_4_ = uVar211;
                              auVar740._20_4_ = uVar211;
                              auVar740._24_4_ = uVar211;
                              auVar740._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar740,local_a00);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar740,local_980);
                              uVar211 = puVar261[2];
                              auVar741._4_4_ = uVar211;
                              auVar741._0_4_ = uVar211;
                              auVar741._8_4_ = uVar211;
                              auVar741._12_4_ = uVar211;
                              auVar741._16_4_ = uVar211;
                              auVar741._20_4_ = uVar211;
                              auVar741._24_4_ = uVar211;
                              auVar741._28_4_ = uVar211;
                              auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar741,auVar458);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar741,local_880);
                              *pauVar212 = ZEXT1632(auVar310);
                              *pauVar195 = ZEXT1632(auVar268);
                              puVar254 = puVar254 + 2;
                              puVar252 = puVar252 + 2;
                              puVar261 = puVar261 + 2;
                              pauVar212 = pauVar212 + 1;
                              pauVar195 = pauVar195 + 1;
                              piVar255 = piVar255 + 2;
                              piVar223 = piVar223 + 2;
                              lVar234 = lVar234 + 8;
                            }
                            piVar222 = piVar223;
                            lVar208 = lVar234;
                          }
                          pauVar236 = pauVar236 + 9;
                          local_b08 = local_b08 + 9;
                        }
                      }
                      for (uVar209 = (long)iVar188 & 0xfffffffffffffffe;
                          (long)uVar209 < (long)iVar188; uVar209 = uVar209 + 1) {
                        uVar242 = (long)top_blob->h * (long)top_blob->w;
                        uVar229 = top_blob->elemsize;
                        uVar196 = (uVar229 * uVar242 + 0xf & 0xfffffffffffffff0) / uVar229;
                        if (top_blob->dims == 4) {
                          uVar196 = uVar242;
                        }
                        if (pvVar204 == (void *)0x0) {
                          uVar306 = 0;
                          uVar266 = 0;
                          uVar307 = 0;
                          uVar308 = 0;
                        }
                        else {
                          puVar224 = (undefined8 *)((long)pvVar204 + uVar209 * 0x20);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                          uVar307 = puVar224[2];
                          uVar308 = puVar224[3];
                        }
                        pauVar253 = (undefined1 (*) [32])
                                    (top_blob->cstep * uVar209 * uVar229 + (long)top_blob->data);
                        iVar239 = (int)uVar196 * top_blob->d;
                        pauVar236 = pauVar253;
                        if (iVar239 < 1) {
                          iVar239 = 0;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *(undefined8 *)*pauVar236 = uVar266;
                          *(undefined8 *)(*pauVar236 + 8) = uVar306;
                          *(undefined8 *)(*pauVar236 + 0x10) = uVar307;
                          *(undefined8 *)(*pauVar236 + 0x18) = uVar308;
                          pauVar236 = pauVar236 + 1;
                        }
                        pauVar236 = (undefined1 (*) [32])
                                    ((this->weight_data_tm).cstep * uVar209 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar229 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar208 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          auVar376 = *pauVar236;
                          auVar1215 = pauVar236[1];
                          auVar1449 = pauVar236[2];
                          auVar1485 = pauVar236[3];
                          auVar613 = pauVar236[4];
                          auVar593 = pauVar236[5];
                          auVar304 = pauVar236[6];
                          auVar594 = pauVar236[7];
                          auVar595 = pauVar236[8];
                          pauVar245 = pauVar253;
                          for (iVar239 = 0; iVar239 != iVar257; iVar239 = iVar239 + 1) {
                            piVar227 = piVar222 + lVar200;
                            piVar223 = piVar255 + lVar200;
                            lVar234 = lVar208 + lVar200 * 4;
                            lVar256 = 0;
                            pauVar195 = pauVar245;
                            for (iVar258 = 0; iVar258 + 7 < iVar187; iVar258 = iVar258 + 8) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar1185._4_4_ = uVar211;
                              auVar1185._0_4_ = uVar211;
                              auVar1185._8_4_ = uVar211;
                              auVar1185._12_4_ = uVar211;
                              auVar1185._16_4_ = uVar211;
                              auVar1185._20_4_ = uVar211;
                              auVar1185._24_4_ = uVar211;
                              auVar1185._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar1272._4_4_ = uVar211;
                              auVar1272._0_4_ = uVar211;
                              auVar1272._8_4_ = uVar211;
                              auVar1272._12_4_ = uVar211;
                              auVar1272._16_4_ = uVar211;
                              auVar1272._20_4_ = uVar211;
                              auVar1272._24_4_ = uVar211;
                              auVar1272._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar1112._4_4_ = uVar211;
                              auVar1112._0_4_ = uVar211;
                              auVar1112._8_4_ = uVar211;
                              auVar1112._12_4_ = uVar211;
                              auVar1112._16_4_ = uVar211;
                              auVar1112._20_4_ = uVar211;
                              auVar1112._24_4_ = uVar211;
                              auVar1112._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar1348._4_4_ = uVar211;
                              auVar1348._0_4_ = uVar211;
                              auVar1348._8_4_ = uVar211;
                              auVar1348._12_4_ = uVar211;
                              auVar1348._16_4_ = uVar211;
                              auVar1348._20_4_ = uVar211;
                              auVar1348._24_4_ = uVar211;
                              auVar1348._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar1428._4_4_ = uVar211;
                              auVar1428._0_4_ = uVar211;
                              auVar1428._8_4_ = uVar211;
                              auVar1428._12_4_ = uVar211;
                              auVar1428._16_4_ = uVar211;
                              auVar1428._20_4_ = uVar211;
                              auVar1428._24_4_ = uVar211;
                              auVar1428._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1185,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar245 + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1272);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar1273._4_4_ = uVar211;
                              auVar1273._0_4_ = uVar211;
                              auVar1273._8_4_ = uVar211;
                              auVar1273._12_4_ = uVar211;
                              auVar1273._16_4_ = uVar211;
                              auVar1273._20_4_ = uVar211;
                              auVar1273._24_4_ = uVar211;
                              auVar1273._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1112,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1348);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar1349._4_4_ = uVar211;
                              auVar1349._0_4_ = uVar211;
                              auVar1349._8_4_ = uVar211;
                              auVar1349._12_4_ = uVar211;
                              auVar1349._16_4_ = uVar211;
                              auVar1349._20_4_ = uVar211;
                              auVar1349._24_4_ = uVar211;
                              auVar1349._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1428);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1429._4_4_ = uVar211;
                              auVar1429._0_4_ = uVar211;
                              auVar1429._8_4_ = uVar211;
                              auVar1429._12_4_ = uVar211;
                              auVar1429._16_4_ = uVar211;
                              auVar1429._20_4_ = uVar211;
                              auVar1429._24_4_ = uVar211;
                              auVar1429._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1273,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1349);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar1350._4_4_ = uVar211;
                              auVar1350._0_4_ = uVar211;
                              auVar1350._8_4_ = uVar211;
                              auVar1350._12_4_ = uVar211;
                              auVar1350._16_4_ = uVar211;
                              auVar1350._20_4_ = uVar211;
                              auVar1350._24_4_ = uVar211;
                              auVar1350._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1429);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1350,auVar595);
                              *(undefined1 (*) [32])(*pauVar245 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar1186._4_4_ = uVar211;
                              auVar1186._0_4_ = uVar211;
                              auVar1186._8_4_ = uVar211;
                              auVar1186._12_4_ = uVar211;
                              auVar1186._16_4_ = uVar211;
                              auVar1186._20_4_ = uVar211;
                              auVar1186._24_4_ = uVar211;
                              auVar1186._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar1430._4_4_ = uVar211;
                              auVar1430._0_4_ = uVar211;
                              auVar1430._8_4_ = uVar211;
                              auVar1430._12_4_ = uVar211;
                              auVar1430._16_4_ = uVar211;
                              auVar1430._20_4_ = uVar211;
                              auVar1430._24_4_ = uVar211;
                              auVar1430._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1112,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[1] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1186);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar1187._4_4_ = uVar211;
                              auVar1187._0_4_ = uVar211;
                              auVar1187._8_4_ = uVar211;
                              auVar1187._12_4_ = uVar211;
                              auVar1187._16_4_ = uVar211;
                              auVar1187._20_4_ = uVar211;
                              auVar1187._24_4_ = uVar211;
                              auVar1187._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1187,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1273);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar1274._4_4_ = uVar211;
                              auVar1274._0_4_ = uVar211;
                              auVar1274._8_4_ = uVar211;
                              auVar1274._12_4_ = uVar211;
                              auVar1274._16_4_ = uVar211;
                              auVar1274._20_4_ = uVar211;
                              auVar1274._24_4_ = uVar211;
                              auVar1274._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1430);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar1431._4_4_ = uVar211;
                              auVar1431._0_4_ = uVar211;
                              auVar1431._8_4_ = uVar211;
                              auVar1431._12_4_ = uVar211;
                              auVar1431._16_4_ = uVar211;
                              auVar1431._20_4_ = uVar211;
                              auVar1431._24_4_ = uVar211;
                              auVar1431._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1431,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1350);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar1351._4_4_ = uVar211;
                              auVar1351._0_4_ = uVar211;
                              auVar1351._8_4_ = uVar211;
                              auVar1351._12_4_ = uVar211;
                              auVar1351._16_4_ = uVar211;
                              auVar1351._20_4_ = uVar211;
                              auVar1351._24_4_ = uVar211;
                              auVar1351._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1274);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1351,auVar595);
                              *(undefined1 (*) [32])(pauVar245[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x14);
                              auVar1113._4_4_ = uVar211;
                              auVar1113._0_4_ = uVar211;
                              auVar1113._8_4_ = uVar211;
                              auVar1113._12_4_ = uVar211;
                              auVar1113._16_4_ = uVar211;
                              auVar1113._20_4_ = uVar211;
                              auVar1113._24_4_ = uVar211;
                              auVar1113._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x14);
                              auVar1275._4_4_ = uVar211;
                              auVar1275._0_4_ = uVar211;
                              auVar1275._8_4_ = uVar211;
                              auVar1275._12_4_ = uVar211;
                              auVar1275._16_4_ = uVar211;
                              auVar1275._20_4_ = uVar211;
                              auVar1275._24_4_ = uVar211;
                              auVar1275._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1187,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[2] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1113);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x18);
                              auVar1114._4_4_ = uVar211;
                              auVar1114._0_4_ = uVar211;
                              auVar1114._8_4_ = uVar211;
                              auVar1114._12_4_ = uVar211;
                              auVar1114._16_4_ = uVar211;
                              auVar1114._20_4_ = uVar211;
                              auVar1114._24_4_ = uVar211;
                              auVar1114._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1114,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1431);
                              uVar211 = *(undefined4 *)(lVar208 + 0x14 + lVar256);
                              auVar1432._4_4_ = uVar211;
                              auVar1432._0_4_ = uVar211;
                              auVar1432._8_4_ = uVar211;
                              auVar1432._12_4_ = uVar211;
                              auVar1432._16_4_ = uVar211;
                              auVar1432._20_4_ = uVar211;
                              auVar1432._24_4_ = uVar211;
                              auVar1432._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1275);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x18);
                              auVar1276._4_4_ = uVar211;
                              auVar1276._0_4_ = uVar211;
                              auVar1276._8_4_ = uVar211;
                              auVar1276._12_4_ = uVar211;
                              auVar1276._16_4_ = uVar211;
                              auVar1276._20_4_ = uVar211;
                              auVar1276._24_4_ = uVar211;
                              auVar1276._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1276,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1351);
                              uVar211 = *(undefined4 *)(lVar208 + 0x18 + lVar256);
                              auVar1352._4_4_ = uVar211;
                              auVar1352._0_4_ = uVar211;
                              auVar1352._8_4_ = uVar211;
                              auVar1352._12_4_ = uVar211;
                              auVar1352._16_4_ = uVar211;
                              auVar1352._20_4_ = uVar211;
                              auVar1352._24_4_ = uVar211;
                              auVar1352._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1432);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1352,auVar595);
                              *(undefined1 (*) [32])(pauVar245[2] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x1c);
                              auVar1188._4_4_ = uVar211;
                              auVar1188._0_4_ = uVar211;
                              auVar1188._8_4_ = uVar211;
                              auVar1188._12_4_ = uVar211;
                              auVar1188._16_4_ = uVar211;
                              auVar1188._20_4_ = uVar211;
                              auVar1188._24_4_ = uVar211;
                              auVar1188._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x1c);
                              auVar1433._4_4_ = uVar211;
                              auVar1433._0_4_ = uVar211;
                              auVar1433._8_4_ = uVar211;
                              auVar1433._12_4_ = uVar211;
                              auVar1433._16_4_ = uVar211;
                              auVar1433._20_4_ = uVar211;
                              auVar1433._24_4_ = uVar211;
                              auVar1433._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1114,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[3] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1188);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x20);
                              auVar1189._4_4_ = uVar211;
                              auVar1189._0_4_ = uVar211;
                              auVar1189._8_4_ = uVar211;
                              auVar1189._12_4_ = uVar211;
                              auVar1189._16_4_ = uVar211;
                              auVar1189._20_4_ = uVar211;
                              auVar1189._24_4_ = uVar211;
                              auVar1189._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1189,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1276);
                              uVar211 = *(undefined4 *)(lVar208 + 0x1c + lVar256);
                              auVar1277._4_4_ = uVar211;
                              auVar1277._0_4_ = uVar211;
                              auVar1277._8_4_ = uVar211;
                              auVar1277._12_4_ = uVar211;
                              auVar1277._16_4_ = uVar211;
                              auVar1277._20_4_ = uVar211;
                              auVar1277._24_4_ = uVar211;
                              auVar1277._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1433);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x20);
                              auVar1434._4_4_ = uVar211;
                              auVar1434._0_4_ = uVar211;
                              auVar1434._8_4_ = uVar211;
                              auVar1434._12_4_ = uVar211;
                              auVar1434._16_4_ = uVar211;
                              auVar1434._20_4_ = uVar211;
                              auVar1434._24_4_ = uVar211;
                              auVar1434._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1434,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1352);
                              uVar211 = *(undefined4 *)(lVar208 + 0x20 + lVar256);
                              auVar1353._4_4_ = uVar211;
                              auVar1353._0_4_ = uVar211;
                              auVar1353._8_4_ = uVar211;
                              auVar1353._12_4_ = uVar211;
                              auVar1353._16_4_ = uVar211;
                              auVar1353._20_4_ = uVar211;
                              auVar1353._24_4_ = uVar211;
                              auVar1353._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1277);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1353,auVar595);
                              *(undefined1 (*) [32])(pauVar245[3] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x24);
                              auVar1115._4_4_ = uVar211;
                              auVar1115._0_4_ = uVar211;
                              auVar1115._8_4_ = uVar211;
                              auVar1115._12_4_ = uVar211;
                              auVar1115._16_4_ = uVar211;
                              auVar1115._20_4_ = uVar211;
                              auVar1115._24_4_ = uVar211;
                              auVar1115._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x24);
                              auVar1278._4_4_ = uVar211;
                              auVar1278._0_4_ = uVar211;
                              auVar1278._8_4_ = uVar211;
                              auVar1278._12_4_ = uVar211;
                              auVar1278._16_4_ = uVar211;
                              auVar1278._20_4_ = uVar211;
                              auVar1278._24_4_ = uVar211;
                              auVar1278._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1189,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[4] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1115);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x28);
                              auVar1116._4_4_ = uVar211;
                              auVar1116._0_4_ = uVar211;
                              auVar1116._8_4_ = uVar211;
                              auVar1116._12_4_ = uVar211;
                              auVar1116._16_4_ = uVar211;
                              auVar1116._20_4_ = uVar211;
                              auVar1116._24_4_ = uVar211;
                              auVar1116._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1116,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1434);
                              uVar211 = *(undefined4 *)(lVar208 + 0x24 + lVar256);
                              auVar1435._4_4_ = uVar211;
                              auVar1435._0_4_ = uVar211;
                              auVar1435._8_4_ = uVar211;
                              auVar1435._12_4_ = uVar211;
                              auVar1435._16_4_ = uVar211;
                              auVar1435._20_4_ = uVar211;
                              auVar1435._24_4_ = uVar211;
                              auVar1435._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1278);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x28);
                              auVar1279._4_4_ = uVar211;
                              auVar1279._0_4_ = uVar211;
                              auVar1279._8_4_ = uVar211;
                              auVar1279._12_4_ = uVar211;
                              auVar1279._16_4_ = uVar211;
                              auVar1279._20_4_ = uVar211;
                              auVar1279._24_4_ = uVar211;
                              auVar1279._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1279,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1353);
                              uVar211 = *(undefined4 *)(lVar208 + 0x28 + lVar256);
                              auVar1354._4_4_ = uVar211;
                              auVar1354._0_4_ = uVar211;
                              auVar1354._8_4_ = uVar211;
                              auVar1354._12_4_ = uVar211;
                              auVar1354._16_4_ = uVar211;
                              auVar1354._20_4_ = uVar211;
                              auVar1354._24_4_ = uVar211;
                              auVar1354._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1435);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1354,auVar595);
                              *(undefined1 (*) [32])(pauVar245[4] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x2c);
                              auVar1190._4_4_ = uVar211;
                              auVar1190._0_4_ = uVar211;
                              auVar1190._8_4_ = uVar211;
                              auVar1190._12_4_ = uVar211;
                              auVar1190._16_4_ = uVar211;
                              auVar1190._20_4_ = uVar211;
                              auVar1190._24_4_ = uVar211;
                              auVar1190._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x2c);
                              auVar1436._4_4_ = uVar211;
                              auVar1436._0_4_ = uVar211;
                              auVar1436._8_4_ = uVar211;
                              auVar1436._12_4_ = uVar211;
                              auVar1436._16_4_ = uVar211;
                              auVar1436._20_4_ = uVar211;
                              auVar1436._24_4_ = uVar211;
                              auVar1436._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1116,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[5] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1190);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x30);
                              auVar1191._4_4_ = uVar211;
                              auVar1191._0_4_ = uVar211;
                              auVar1191._8_4_ = uVar211;
                              auVar1191._12_4_ = uVar211;
                              auVar1191._16_4_ = uVar211;
                              auVar1191._20_4_ = uVar211;
                              auVar1191._24_4_ = uVar211;
                              auVar1191._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1191,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1279);
                              uVar211 = *(undefined4 *)(lVar208 + 0x2c + lVar256);
                              auVar1280._4_4_ = uVar211;
                              auVar1280._0_4_ = uVar211;
                              auVar1280._8_4_ = uVar211;
                              auVar1280._12_4_ = uVar211;
                              auVar1280._16_4_ = uVar211;
                              auVar1280._20_4_ = uVar211;
                              auVar1280._24_4_ = uVar211;
                              auVar1280._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1436);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x30);
                              auVar1437._4_4_ = uVar211;
                              auVar1437._0_4_ = uVar211;
                              auVar1437._8_4_ = uVar211;
                              auVar1437._12_4_ = uVar211;
                              auVar1437._16_4_ = uVar211;
                              auVar1437._20_4_ = uVar211;
                              auVar1437._24_4_ = uVar211;
                              auVar1437._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1437,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1354);
                              uVar211 = *(undefined4 *)(lVar208 + 0x30 + lVar256);
                              auVar1355._4_4_ = uVar211;
                              auVar1355._0_4_ = uVar211;
                              auVar1355._8_4_ = uVar211;
                              auVar1355._12_4_ = uVar211;
                              auVar1355._16_4_ = uVar211;
                              auVar1355._20_4_ = uVar211;
                              auVar1355._24_4_ = uVar211;
                              auVar1355._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1280);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1355,auVar595);
                              *(undefined1 (*) [32])(pauVar245[5] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x34);
                              auVar1117._4_4_ = uVar211;
                              auVar1117._0_4_ = uVar211;
                              auVar1117._8_4_ = uVar211;
                              auVar1117._12_4_ = uVar211;
                              auVar1117._16_4_ = uVar211;
                              auVar1117._20_4_ = uVar211;
                              auVar1117._24_4_ = uVar211;
                              auVar1117._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x34);
                              auVar1281._4_4_ = uVar211;
                              auVar1281._0_4_ = uVar211;
                              auVar1281._8_4_ = uVar211;
                              auVar1281._12_4_ = uVar211;
                              auVar1281._16_4_ = uVar211;
                              auVar1281._20_4_ = uVar211;
                              auVar1281._24_4_ = uVar211;
                              auVar1281._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1191,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[6] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1117);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x38);
                              auVar1118._4_4_ = uVar211;
                              auVar1118._0_4_ = uVar211;
                              auVar1118._8_4_ = uVar211;
                              auVar1118._12_4_ = uVar211;
                              auVar1118._16_4_ = uVar211;
                              auVar1118._20_4_ = uVar211;
                              auVar1118._24_4_ = uVar211;
                              auVar1118._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1118,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1437);
                              uVar211 = *(undefined4 *)(lVar208 + 0x34 + lVar256);
                              auVar1438._4_4_ = uVar211;
                              auVar1438._0_4_ = uVar211;
                              auVar1438._8_4_ = uVar211;
                              auVar1438._12_4_ = uVar211;
                              auVar1438._16_4_ = uVar211;
                              auVar1438._20_4_ = uVar211;
                              auVar1438._24_4_ = uVar211;
                              auVar1438._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1281);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x38);
                              auVar1282._4_4_ = uVar211;
                              auVar1282._0_4_ = uVar211;
                              auVar1282._8_4_ = uVar211;
                              auVar1282._12_4_ = uVar211;
                              auVar1282._16_4_ = uVar211;
                              auVar1282._20_4_ = uVar211;
                              auVar1282._24_4_ = uVar211;
                              auVar1282._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1282,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1355);
                              uVar211 = *(undefined4 *)(lVar208 + 0x38 + lVar256);
                              auVar1356._4_4_ = uVar211;
                              auVar1356._0_4_ = uVar211;
                              auVar1356._8_4_ = uVar211;
                              auVar1356._12_4_ = uVar211;
                              auVar1356._16_4_ = uVar211;
                              auVar1356._20_4_ = uVar211;
                              auVar1356._24_4_ = uVar211;
                              auVar1356._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1438);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1356,auVar595);
                              *(undefined1 (*) [32])(pauVar245[6] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x3c);
                              auVar1192._4_4_ = uVar211;
                              auVar1192._0_4_ = uVar211;
                              auVar1192._8_4_ = uVar211;
                              auVar1192._12_4_ = uVar211;
                              auVar1192._16_4_ = uVar211;
                              auVar1192._20_4_ = uVar211;
                              auVar1192._24_4_ = uVar211;
                              auVar1192._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x3c);
                              auVar1439._4_4_ = uVar211;
                              auVar1439._0_4_ = uVar211;
                              auVar1439._8_4_ = uVar211;
                              auVar1439._12_4_ = uVar211;
                              auVar1439._16_4_ = uVar211;
                              auVar1439._20_4_ = uVar211;
                              auVar1439._24_4_ = uVar211;
                              auVar1439._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1118,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[7] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1192);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x40);
                              auVar1193._4_4_ = uVar211;
                              auVar1193._0_4_ = uVar211;
                              auVar1193._8_4_ = uVar211;
                              auVar1193._12_4_ = uVar211;
                              auVar1193._16_4_ = uVar211;
                              auVar1193._20_4_ = uVar211;
                              auVar1193._24_4_ = uVar211;
                              auVar1193._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1193);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1282);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x40);
                              auVar1194._4_4_ = uVar211;
                              auVar1194._0_4_ = uVar211;
                              auVar1194._8_4_ = uVar211;
                              auVar1194._12_4_ = uVar211;
                              auVar1194._16_4_ = uVar211;
                              auVar1194._20_4_ = uVar211;
                              auVar1194._24_4_ = uVar211;
                              auVar1194._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1439);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1194);
                              uVar211 = *(undefined4 *)(lVar208 + 0x3c + lVar256);
                              auVar1195._4_4_ = uVar211;
                              auVar1195._0_4_ = uVar211;
                              auVar1195._8_4_ = uVar211;
                              auVar1195._12_4_ = uVar211;
                              auVar1195._16_4_ = uVar211;
                              auVar1195._20_4_ = uVar211;
                              auVar1195._24_4_ = uVar211;
                              auVar1195._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1356);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1195);
                              uVar211 = *(undefined4 *)(lVar208 + 0x40 + lVar256);
                              auVar1196._4_4_ = uVar211;
                              auVar1196._0_4_ = uVar211;
                              auVar1196._8_4_ = uVar211;
                              auVar1196._12_4_ = uVar211;
                              auVar1196._16_4_ = uVar211;
                              auVar1196._20_4_ = uVar211;
                              auVar1196._24_4_ = uVar211;
                              auVar1196._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar595,auVar1196);
                              *(undefined1 (*) [32])(pauVar245[7] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar195 = pauVar195 + 8;
                              lVar256 = lVar256 + 0x40;
                              piVar227 = piVar227 + 0x10;
                              piVar223 = piVar223 + 0x10;
                              lVar234 = lVar234 + 0x40;
                            }
                            for (; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar1197._4_4_ = uVar211;
                              auVar1197._0_4_ = uVar211;
                              auVar1197._8_4_ = uVar211;
                              auVar1197._12_4_ = uVar211;
                              auVar1197._16_4_ = uVar211;
                              auVar1197._20_4_ = uVar211;
                              auVar1197._24_4_ = uVar211;
                              auVar1197._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar1283._4_4_ = uVar211;
                              auVar1283._0_4_ = uVar211;
                              auVar1283._8_4_ = uVar211;
                              auVar1283._12_4_ = uVar211;
                              auVar1283._16_4_ = uVar211;
                              auVar1283._20_4_ = uVar211;
                              auVar1283._24_4_ = uVar211;
                              auVar1283._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar1119._4_4_ = uVar211;
                              auVar1119._0_4_ = uVar211;
                              auVar1119._8_4_ = uVar211;
                              auVar1119._12_4_ = uVar211;
                              auVar1119._16_4_ = uVar211;
                              auVar1119._20_4_ = uVar211;
                              auVar1119._24_4_ = uVar211;
                              auVar1119._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar1357._4_4_ = uVar211;
                              auVar1357._0_4_ = uVar211;
                              auVar1357._8_4_ = uVar211;
                              auVar1357._12_4_ = uVar211;
                              auVar1357._16_4_ = uVar211;
                              auVar1357._20_4_ = uVar211;
                              auVar1357._24_4_ = uVar211;
                              auVar1357._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar1440._4_4_ = uVar211;
                              auVar1440._0_4_ = uVar211;
                              auVar1440._8_4_ = uVar211;
                              auVar1440._12_4_ = uVar211;
                              auVar1440._16_4_ = uVar211;
                              auVar1440._20_4_ = uVar211;
                              auVar1440._24_4_ = uVar211;
                              auVar1440._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1197,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar245 + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1283);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar1284._4_4_ = uVar211;
                              auVar1284._0_4_ = uVar211;
                              auVar1284._8_4_ = uVar211;
                              auVar1284._12_4_ = uVar211;
                              auVar1284._16_4_ = uVar211;
                              auVar1284._20_4_ = uVar211;
                              auVar1284._24_4_ = uVar211;
                              auVar1284._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1119,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1357);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar1358._4_4_ = uVar211;
                              auVar1358._0_4_ = uVar211;
                              auVar1358._8_4_ = uVar211;
                              auVar1358._12_4_ = uVar211;
                              auVar1358._16_4_ = uVar211;
                              auVar1358._20_4_ = uVar211;
                              auVar1358._24_4_ = uVar211;
                              auVar1358._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1440);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1441._4_4_ = uVar211;
                              auVar1441._0_4_ = uVar211;
                              auVar1441._8_4_ = uVar211;
                              auVar1441._12_4_ = uVar211;
                              auVar1441._16_4_ = uVar211;
                              auVar1441._20_4_ = uVar211;
                              auVar1441._24_4_ = uVar211;
                              auVar1441._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1284,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1358);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar1359._4_4_ = uVar211;
                              auVar1359._0_4_ = uVar211;
                              auVar1359._8_4_ = uVar211;
                              auVar1359._12_4_ = uVar211;
                              auVar1359._16_4_ = uVar211;
                              auVar1359._20_4_ = uVar211;
                              auVar1359._24_4_ = uVar211;
                              auVar1359._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1441);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1359,auVar595);
                              *(undefined1 (*) [32])(*pauVar245 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar1198._4_4_ = uVar211;
                              auVar1198._0_4_ = uVar211;
                              auVar1198._8_4_ = uVar211;
                              auVar1198._12_4_ = uVar211;
                              auVar1198._16_4_ = uVar211;
                              auVar1198._20_4_ = uVar211;
                              auVar1198._24_4_ = uVar211;
                              auVar1198._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar1442._4_4_ = uVar211;
                              auVar1442._0_4_ = uVar211;
                              auVar1442._8_4_ = uVar211;
                              auVar1442._12_4_ = uVar211;
                              auVar1442._16_4_ = uVar211;
                              auVar1442._20_4_ = uVar211;
                              auVar1442._24_4_ = uVar211;
                              auVar1442._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1119,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[1] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1198);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar1199._4_4_ = uVar211;
                              auVar1199._0_4_ = uVar211;
                              auVar1199._8_4_ = uVar211;
                              auVar1199._12_4_ = uVar211;
                              auVar1199._16_4_ = uVar211;
                              auVar1199._20_4_ = uVar211;
                              auVar1199._24_4_ = uVar211;
                              auVar1199._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1199,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1284);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar1285._4_4_ = uVar211;
                              auVar1285._0_4_ = uVar211;
                              auVar1285._8_4_ = uVar211;
                              auVar1285._12_4_ = uVar211;
                              auVar1285._16_4_ = uVar211;
                              auVar1285._20_4_ = uVar211;
                              auVar1285._24_4_ = uVar211;
                              auVar1285._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1442);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar1443._4_4_ = uVar211;
                              auVar1443._0_4_ = uVar211;
                              auVar1443._8_4_ = uVar211;
                              auVar1443._12_4_ = uVar211;
                              auVar1443._16_4_ = uVar211;
                              auVar1443._20_4_ = uVar211;
                              auVar1443._24_4_ = uVar211;
                              auVar1443._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1443,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1359);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar1360._4_4_ = uVar211;
                              auVar1360._0_4_ = uVar211;
                              auVar1360._8_4_ = uVar211;
                              auVar1360._12_4_ = uVar211;
                              auVar1360._16_4_ = uVar211;
                              auVar1360._20_4_ = uVar211;
                              auVar1360._24_4_ = uVar211;
                              auVar1360._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1285);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1360,auVar595);
                              *(undefined1 (*) [32])(pauVar245[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x14);
                              auVar1120._4_4_ = uVar211;
                              auVar1120._0_4_ = uVar211;
                              auVar1120._8_4_ = uVar211;
                              auVar1120._12_4_ = uVar211;
                              auVar1120._16_4_ = uVar211;
                              auVar1120._20_4_ = uVar211;
                              auVar1120._24_4_ = uVar211;
                              auVar1120._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x14);
                              auVar1286._4_4_ = uVar211;
                              auVar1286._0_4_ = uVar211;
                              auVar1286._8_4_ = uVar211;
                              auVar1286._12_4_ = uVar211;
                              auVar1286._16_4_ = uVar211;
                              auVar1286._20_4_ = uVar211;
                              auVar1286._24_4_ = uVar211;
                              auVar1286._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1199,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[2] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1120);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x18);
                              auVar1121._4_4_ = uVar211;
                              auVar1121._0_4_ = uVar211;
                              auVar1121._8_4_ = uVar211;
                              auVar1121._12_4_ = uVar211;
                              auVar1121._16_4_ = uVar211;
                              auVar1121._20_4_ = uVar211;
                              auVar1121._24_4_ = uVar211;
                              auVar1121._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1121,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1443);
                              uVar211 = *(undefined4 *)(lVar208 + 0x14 + lVar256);
                              auVar1444._4_4_ = uVar211;
                              auVar1444._0_4_ = uVar211;
                              auVar1444._8_4_ = uVar211;
                              auVar1444._12_4_ = uVar211;
                              auVar1444._16_4_ = uVar211;
                              auVar1444._20_4_ = uVar211;
                              auVar1444._24_4_ = uVar211;
                              auVar1444._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1286);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x18);
                              auVar1287._4_4_ = uVar211;
                              auVar1287._0_4_ = uVar211;
                              auVar1287._8_4_ = uVar211;
                              auVar1287._12_4_ = uVar211;
                              auVar1287._16_4_ = uVar211;
                              auVar1287._20_4_ = uVar211;
                              auVar1287._24_4_ = uVar211;
                              auVar1287._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1287,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1360);
                              uVar211 = *(undefined4 *)(lVar208 + 0x18 + lVar256);
                              auVar1361._4_4_ = uVar211;
                              auVar1361._0_4_ = uVar211;
                              auVar1361._8_4_ = uVar211;
                              auVar1361._12_4_ = uVar211;
                              auVar1361._16_4_ = uVar211;
                              auVar1361._20_4_ = uVar211;
                              auVar1361._24_4_ = uVar211;
                              auVar1361._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1444);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1361,auVar595);
                              *(undefined1 (*) [32])(pauVar245[2] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x1c);
                              auVar1200._4_4_ = uVar211;
                              auVar1200._0_4_ = uVar211;
                              auVar1200._8_4_ = uVar211;
                              auVar1200._12_4_ = uVar211;
                              auVar1200._16_4_ = uVar211;
                              auVar1200._20_4_ = uVar211;
                              auVar1200._24_4_ = uVar211;
                              auVar1200._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x1c);
                              auVar1445._4_4_ = uVar211;
                              auVar1445._0_4_ = uVar211;
                              auVar1445._8_4_ = uVar211;
                              auVar1445._12_4_ = uVar211;
                              auVar1445._16_4_ = uVar211;
                              auVar1445._20_4_ = uVar211;
                              auVar1445._24_4_ = uVar211;
                              auVar1445._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1121,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[3] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1200);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x20);
                              auVar1201._4_4_ = uVar211;
                              auVar1201._0_4_ = uVar211;
                              auVar1201._8_4_ = uVar211;
                              auVar1201._12_4_ = uVar211;
                              auVar1201._16_4_ = uVar211;
                              auVar1201._20_4_ = uVar211;
                              auVar1201._24_4_ = uVar211;
                              auVar1201._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1201);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1287);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x20);
                              auVar1202._4_4_ = uVar211;
                              auVar1202._0_4_ = uVar211;
                              auVar1202._8_4_ = uVar211;
                              auVar1202._12_4_ = uVar211;
                              auVar1202._16_4_ = uVar211;
                              auVar1202._20_4_ = uVar211;
                              auVar1202._24_4_ = uVar211;
                              auVar1202._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1445);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1202);
                              uVar211 = *(undefined4 *)(lVar208 + 0x1c + lVar256);
                              auVar1203._4_4_ = uVar211;
                              auVar1203._0_4_ = uVar211;
                              auVar1203._8_4_ = uVar211;
                              auVar1203._12_4_ = uVar211;
                              auVar1203._16_4_ = uVar211;
                              auVar1203._20_4_ = uVar211;
                              auVar1203._24_4_ = uVar211;
                              auVar1203._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1361);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1203);
                              uVar211 = *(undefined4 *)(lVar208 + 0x20 + lVar256);
                              auVar1204._4_4_ = uVar211;
                              auVar1204._0_4_ = uVar211;
                              auVar1204._8_4_ = uVar211;
                              auVar1204._12_4_ = uVar211;
                              auVar1204._16_4_ = uVar211;
                              auVar1204._20_4_ = uVar211;
                              auVar1204._24_4_ = uVar211;
                              auVar1204._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar595,auVar1204);
                              *(undefined1 (*) [32])(pauVar245[3] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar195 = pauVar195 + 4;
                              lVar256 = lVar256 + 0x20;
                              piVar227 = piVar227 + 8;
                              piVar223 = piVar223 + 8;
                              lVar234 = lVar234 + 0x20;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar1288._4_4_ = uVar211;
                              auVar1288._0_4_ = uVar211;
                              auVar1288._8_4_ = uVar211;
                              auVar1288._12_4_ = uVar211;
                              auVar1288._16_4_ = uVar211;
                              auVar1288._20_4_ = uVar211;
                              auVar1288._24_4_ = uVar211;
                              auVar1288._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar1205._4_4_ = uVar211;
                              auVar1205._0_4_ = uVar211;
                              auVar1205._8_4_ = uVar211;
                              auVar1205._12_4_ = uVar211;
                              auVar1205._16_4_ = uVar211;
                              auVar1205._20_4_ = uVar211;
                              auVar1205._24_4_ = uVar211;
                              auVar1205._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar1122._4_4_ = uVar211;
                              auVar1122._0_4_ = uVar211;
                              auVar1122._8_4_ = uVar211;
                              auVar1122._12_4_ = uVar211;
                              auVar1122._16_4_ = uVar211;
                              auVar1122._20_4_ = uVar211;
                              auVar1122._24_4_ = uVar211;
                              auVar1122._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar1362._4_4_ = uVar211;
                              auVar1362._0_4_ = uVar211;
                              auVar1362._8_4_ = uVar211;
                              auVar1362._12_4_ = uVar211;
                              auVar1362._16_4_ = uVar211;
                              auVar1362._20_4_ = uVar211;
                              auVar1362._24_4_ = uVar211;
                              auVar1362._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar1446._4_4_ = uVar211;
                              auVar1446._0_4_ = uVar211;
                              auVar1446._8_4_ = uVar211;
                              auVar1446._12_4_ = uVar211;
                              auVar1446._16_4_ = uVar211;
                              auVar1446._20_4_ = uVar211;
                              auVar1446._24_4_ = uVar211;
                              auVar1446._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1288,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (*pauVar245 + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1205);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar1206._4_4_ = uVar211;
                              auVar1206._0_4_ = uVar211;
                              auVar1206._8_4_ = uVar211;
                              auVar1206._12_4_ = uVar211;
                              auVar1206._16_4_ = uVar211;
                              auVar1206._20_4_ = uVar211;
                              auVar1206._24_4_ = uVar211;
                              auVar1206._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1122,auVar1449);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1362);
                              uVar211 = *(undefined4 *)(lVar208 + lVar256);
                              auVar1363._4_4_ = uVar211;
                              auVar1363._0_4_ = uVar211;
                              auVar1363._8_4_ = uVar211;
                              auVar1363._12_4_ = uVar211;
                              auVar1363._16_4_ = uVar211;
                              auVar1363._20_4_ = uVar211;
                              auVar1363._24_4_ = uVar211;
                              auVar1363._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1446);
                              uVar211 = *(undefined4 *)(lVar208 + 4 + lVar256);
                              auVar1447._4_4_ = uVar211;
                              auVar1447._0_4_ = uVar211;
                              auVar1447._8_4_ = uVar211;
                              auVar1447._12_4_ = uVar211;
                              auVar1447._16_4_ = uVar211;
                              auVar1447._20_4_ = uVar211;
                              auVar1447._24_4_ = uVar211;
                              auVar1447._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1206,auVar593);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1363);
                              uVar211 = *(undefined4 *)(lVar208 + 8 + lVar256);
                              auVar1364._4_4_ = uVar211;
                              auVar1364._0_4_ = uVar211;
                              auVar1364._8_4_ = uVar211;
                              auVar1364._12_4_ = uVar211;
                              auVar1364._16_4_ = uVar211;
                              auVar1364._20_4_ = uVar211;
                              auVar1364._24_4_ = uVar211;
                              auVar1364._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1447);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1364,auVar595);
                              *(undefined1 (*) [32])(*pauVar245 + lVar256 * 4) = ZEXT1632(auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar1289._4_4_ = uVar211;
                              auVar1289._0_4_ = uVar211;
                              auVar1289._8_4_ = uVar211;
                              auVar1289._12_4_ = uVar211;
                              auVar1289._16_4_ = uVar211;
                              auVar1289._20_4_ = uVar211;
                              auVar1289._24_4_ = uVar211;
                              auVar1289._28_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar1448._4_4_ = uVar211;
                              auVar1448._0_4_ = uVar211;
                              auVar1448._8_4_ = uVar211;
                              auVar1448._12_4_ = uVar211;
                              auVar1448._16_4_ = uVar211;
                              auVar1448._20_4_ = uVar211;
                              auVar1448._24_4_ = uVar211;
                              auVar1448._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1122,auVar376,
                                                         *(undefined1 (*) [32])
                                                          (pauVar245[1] + lVar256 * 4));
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1289);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar1290._4_4_ = uVar211;
                              auVar1290._0_4_ = uVar211;
                              auVar1290._8_4_ = uVar211;
                              auVar1290._12_4_ = uVar211;
                              auVar1290._16_4_ = uVar211;
                              auVar1290._20_4_ = uVar211;
                              auVar1290._24_4_ = uVar211;
                              auVar1290._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1290);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1206);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar1207._4_4_ = uVar211;
                              auVar1207._0_4_ = uVar211;
                              auVar1207._8_4_ = uVar211;
                              auVar1207._12_4_ = uVar211;
                              auVar1207._16_4_ = uVar211;
                              auVar1207._20_4_ = uVar211;
                              auVar1207._24_4_ = uVar211;
                              auVar1207._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1448);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1207);
                              uVar211 = *(undefined4 *)(lVar208 + 0xc + lVar256);
                              auVar1208._4_4_ = uVar211;
                              auVar1208._0_4_ = uVar211;
                              auVar1208._8_4_ = uVar211;
                              auVar1208._12_4_ = uVar211;
                              auVar1208._16_4_ = uVar211;
                              auVar1208._20_4_ = uVar211;
                              auVar1208._24_4_ = uVar211;
                              auVar1208._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1364);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1208);
                              uVar211 = *(undefined4 *)(lVar208 + 0x10 + lVar256);
                              auVar1209._4_4_ = uVar211;
                              auVar1209._0_4_ = uVar211;
                              auVar1209._8_4_ = uVar211;
                              auVar1209._12_4_ = uVar211;
                              auVar1209._16_4_ = uVar211;
                              auVar1209._20_4_ = uVar211;
                              auVar1209._24_4_ = uVar211;
                              auVar1209._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar595,auVar1209);
                              *(undefined1 (*) [32])(pauVar245[1] + lVar256 * 4) =
                                   ZEXT1632(auVar268);
                              pauVar195 = pauVar195 + 2;
                              lVar256 = lVar256 + 0x10;
                              piVar227 = piVar227 + 4;
                              piVar223 = piVar223 + 4;
                              lVar234 = lVar234 + 0x10;
                            }
                            puVar254 = (undefined4 *)((long)piVar222 + lVar256);
                            puVar252 = (undefined4 *)((long)piVar255 + lVar256);
                            puVar261 = (undefined4 *)(lVar208 + lVar256);
                            piVar222 = piVar227;
                            lVar208 = lVar234;
                            piVar255 = piVar223;
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *puVar254;
                              auVar1123._4_4_ = uVar211;
                              auVar1123._0_4_ = uVar211;
                              auVar1123._8_4_ = uVar211;
                              auVar1123._12_4_ = uVar211;
                              auVar1123._16_4_ = uVar211;
                              auVar1123._20_4_ = uVar211;
                              auVar1123._24_4_ = uVar211;
                              auVar1123._28_4_ = uVar211;
                              uVar211 = puVar254[1];
                              auVar1210._4_4_ = uVar211;
                              auVar1210._0_4_ = uVar211;
                              auVar1210._8_4_ = uVar211;
                              auVar1210._12_4_ = uVar211;
                              auVar1210._16_4_ = uVar211;
                              auVar1210._20_4_ = uVar211;
                              auVar1210._24_4_ = uVar211;
                              auVar1210._28_4_ = uVar211;
                              uVar211 = puVar254[2];
                              auVar1291._4_4_ = uVar211;
                              auVar1291._0_4_ = uVar211;
                              auVar1291._8_4_ = uVar211;
                              auVar1291._12_4_ = uVar211;
                              auVar1291._16_4_ = uVar211;
                              auVar1291._20_4_ = uVar211;
                              auVar1291._24_4_ = uVar211;
                              auVar1291._28_4_ = uVar211;
                              uVar211 = *puVar252;
                              auVar1365._4_4_ = uVar211;
                              auVar1365._0_4_ = uVar211;
                              auVar1365._8_4_ = uVar211;
                              auVar1365._12_4_ = uVar211;
                              auVar1365._16_4_ = uVar211;
                              auVar1365._20_4_ = uVar211;
                              auVar1365._24_4_ = uVar211;
                              auVar1365._28_4_ = uVar211;
                              auVar268 = vfmadd213ps_fma(auVar1123,auVar376,*pauVar195);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1215,auVar1210);
                              uVar211 = puVar252[1];
                              auVar1211._4_4_ = uVar211;
                              auVar1211._0_4_ = uVar211;
                              auVar1211._8_4_ = uVar211;
                              auVar1211._12_4_ = uVar211;
                              auVar1211._16_4_ = uVar211;
                              auVar1211._20_4_ = uVar211;
                              auVar1211._24_4_ = uVar211;
                              auVar1211._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1449,auVar1291);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar1485,auVar1365);
                              uVar211 = puVar252[2];
                              auVar1292._4_4_ = uVar211;
                              auVar1292._0_4_ = uVar211;
                              auVar1292._8_4_ = uVar211;
                              auVar1292._12_4_ = uVar211;
                              auVar1292._16_4_ = uVar211;
                              auVar1292._20_4_ = uVar211;
                              auVar1292._24_4_ = uVar211;
                              auVar1292._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar613,auVar1211);
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,auVar1292);
                              uVar211 = *puVar261;
                              auVar1212._4_4_ = uVar211;
                              auVar1212._0_4_ = uVar211;
                              auVar1212._8_4_ = uVar211;
                              auVar1212._12_4_ = uVar211;
                              auVar1212._16_4_ = uVar211;
                              auVar1212._20_4_ = uVar211;
                              auVar1212._24_4_ = uVar211;
                              auVar1212._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar304,auVar1212);
                              uVar211 = puVar261[1];
                              auVar1213._4_4_ = uVar211;
                              auVar1213._0_4_ = uVar211;
                              auVar1213._8_4_ = uVar211;
                              auVar1213._12_4_ = uVar211;
                              auVar1213._16_4_ = uVar211;
                              auVar1213._20_4_ = uVar211;
                              auVar1213._24_4_ = uVar211;
                              auVar1213._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,auVar1213);
                              uVar211 = puVar261[2];
                              auVar1214._4_4_ = uVar211;
                              auVar1214._0_4_ = uVar211;
                              auVar1214._8_4_ = uVar211;
                              auVar1214._12_4_ = uVar211;
                              auVar1214._16_4_ = uVar211;
                              auVar1214._20_4_ = uVar211;
                              auVar1214._24_4_ = uVar211;
                              auVar1214._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar595,auVar1214);
                              *pauVar195 = ZEXT1632(auVar268);
                              puVar254 = puVar254 + 2;
                              puVar252 = puVar252 + 2;
                              puVar261 = puVar261 + 2;
                              pauVar195 = pauVar195 + 1;
                              piVar222 = piVar222 + 2;
                              piVar255 = piVar255 + 2;
                              lVar208 = lVar208 + 8;
                            }
                            pauVar245 = pauVar195;
                          }
                          pauVar236 = pauVar236 + 9;
                        }
                      }
                      pLVar233 = this->activation;
                      goto LAB_001c686b;
                    }
                  }
LAB_001c05c0:
                  uVar244 = auVar945._8_4_ ^ 1;
                  uVar247 = auVar945._12_4_ ^ 1;
                  if (iVar257 == 1 &&
                      (iVar249 == 1 &&
                      ((uVar244 == 0 && uVar247 == 0) &&
                      (((iVar258 == 1 && iVar239 == 8) && (auVar945._0_4_ ^ 3) == 0) &&
                      (auVar945._4_4_ ^ 3) == 0)))) {
                    iVar187 = top_blob->w;
                    uVar259 = top_blob->h;
                    pvVar204 = (this->super_Convolution).bias_data.data;
                    pvVar251 = (this->weight_data_tm).data;
                    local_a20._0_4_ = (int)pvVar251;
                    local_a20._4_4_ = (int)((ulong)pvVar251 >> 0x20);
                    local_a00._0_8_ = top_blob->elemsize;
                    lVar200 = top_blob->cstep * local_a00._0_8_;
                    local_880._0_8_ = (long)(int)uVar259 * (long)iVar187;
                    local_9a0._0_8_ = local_a00._0_8_ * local_880._0_8_ + 0xf & 0xfffffffffffffff0;
                    local_960._0_8_ = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep
                    ;
                    iVar257 = 0;
                    if (0 < iVar187) {
                      iVar257 = iVar187;
                    }
                    uVar210 = 0;
                    if (0 < (int)uVar259) {
                      uVar210 = (ulong)uVar259;
                    }
                    iVar187 = top_blob->d;
                    local_980._0_4_ = iVar187;
                    uVar209 = (ulong)(uint)local_920.c;
                    if (local_920.c < 1) {
                      uVar209 = 0;
                    }
                    uVar229 = (ulong)(uint)top_blob->c;
                    if (top_blob->c < 1) {
                      uVar229 = 0;
                    }
                    local_a60._0_4_ = (float)uVar229;
                    local_a60._4_4_ = 0;
                    pvVar198 = top_blob->data;
                    iVar188 = top_blob->dims;
                    local_7c0._0_4_ = iVar188;
                    local_840._0_4_ = (uint)pvVar198;
                    local_840._4_4_ = (undefined4)((ulong)pvVar198 >> 0x20);
                    local_a80._0_4_ = SUB84(pvVar204,0);
                    local_a80._4_4_ = (int)((ulong)pvVar204 >> 0x20);
                    local_9c0._0_8_ = lVar200;
                    pvVar228 = pvVar198;
                    for (uVar196 = 0; uVar196 != uVar229; uVar196 = uVar196 + 1) {
                      iVar239 = (int)((ulong)local_9a0._0_8_ / (ulong)local_a00._0_8_);
                      if (iVar188 == 4) {
                        iVar239 = (int)local_880._0_8_;
                      }
                      if (pvVar204 == (void *)0x0) {
                        uVar211 = 0;
                      }
                      else {
                        uVar211 = *(undefined4 *)((long)pvVar204 + uVar196 * 4);
                      }
                      iVar239 = iVar239 * iVar187;
                      if (iVar239 < 1) {
                        iVar239 = 0;
                      }
                      for (lVar208 = 0; iVar239 != (int)lVar208; lVar208 = lVar208 + 1) {
                        *(undefined4 *)((long)pvVar228 + lVar208 * 4) = uVar211;
                      }
                      local_a40._0_4_ = (float)uVar196;
                      local_a40._4_4_ = (int)(uVar196 >> 0x20);
                      pfVar197 = (float *)(local_960._0_8_ * uVar196 + (long)pvVar251);
                      lVar208 = (long)local_920.w * local_920.elemsize;
                      lVar234 = 0;
                      for (uVar242 = 0; uVar242 != uVar209; uVar242 = uVar242 + 1) {
                        fVar248 = *pfVar197;
                        fVar220 = pfVar197[1];
                        fVar864 = pfVar197[2];
                        fVar865 = pfVar197[3];
                        fVar866 = pfVar197[4];
                        fVar867 = pfVar197[5];
                        fVar868 = pfVar197[6];
                        auVar376 = *(undefined1 (*) [32])(pfVar197 + 8);
                        auVar1215 = *(undefined1 (*) [32])(pfVar197 + 0x10);
                        auVar1449 = *(undefined1 (*) [32])(pfVar197 + 0x18);
                        auVar1485 = *(undefined1 (*) [32])(pfVar197 + 0x20);
                        auVar613 = *(undefined1 (*) [32])(pfVar197 + 0x28);
                        auVar593 = *(undefined1 (*) [32])(pfVar197 + 0x30);
                        auVar304 = *(undefined1 (*) [32])(pfVar197 + 0x38);
                        auVar594 = *(undefined1 (*) [32])(pfVar197 + 0x40);
                        uVar237 = 0;
                        pfVar206 = (float *)(lVar200 * uVar196 + (long)pvVar198);
                        lVar256 = lVar234;
                        while (uVar237 != uVar210) {
                          uVar237 = uVar237 + 1;
                          lVar201 = lVar256;
                          iVar239 = iVar257;
                          while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                            pfVar246 = (float *)((long)local_920.data + lVar201);
                            auVar1060._0_4_ = fVar248 * *pfVar246;
                            auVar1060._4_4_ = fVar220 * pfVar246[1];
                            auVar1060._8_4_ = fVar864 * pfVar246[2];
                            auVar1060._12_4_ = fVar865 * pfVar246[3];
                            auVar1060._16_4_ = fVar866 * pfVar246[4];
                            auVar1060._20_4_ = fVar867 * pfVar246[5];
                            auVar1060._28_36_ = in_ZMM10._28_36_;
                            auVar1060._24_4_ = fVar868 * pfVar246[6];
                            pfVar246 = (float *)((long)local_920.data + lVar201 + 0x20);
                            auVar1130._0_4_ = auVar376._0_4_ * *pfVar246;
                            auVar1130._4_4_ = auVar376._4_4_ * pfVar246[1];
                            auVar1130._8_4_ = auVar376._8_4_ * pfVar246[2];
                            auVar1130._12_4_ = auVar376._12_4_ * pfVar246[3];
                            auVar1130._16_4_ = auVar376._16_4_ * pfVar246[4];
                            auVar1130._20_4_ = auVar376._20_4_ * pfVar246[5];
                            auVar1130._28_36_ = in_ZMM11._28_36_;
                            auVar1130._24_4_ = auVar376._24_4_ * pfVar246[6];
                            pfVar246 = (float *)((long)local_920.data + lVar201 + 0x40);
                            auVar1218._0_4_ = auVar1215._0_4_ * *pfVar246;
                            auVar1218._4_4_ = auVar1215._4_4_ * pfVar246[1];
                            auVar1218._8_4_ = auVar1215._8_4_ * pfVar246[2];
                            auVar1218._12_4_ = auVar1215._12_4_ * pfVar246[3];
                            auVar1218._16_4_ = auVar1215._16_4_ * pfVar246[4];
                            auVar1218._20_4_ = auVar1215._20_4_ * pfVar246[5];
                            auVar1218._28_36_ = in_ZMM12._28_36_;
                            auVar1218._24_4_ = auVar1215._24_4_ * pfVar246[6];
                            auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar1449,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data + lVar201 + lVar208));
                            auVar310 = vfmadd231ps_fma(auVar1130._0_32_,auVar1485,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data +
                                                        lVar201 + lVar208 + 0x20));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar593,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data +
                                                        lVar201 + lVar208 * 2));
                            auVar310 = vfmadd231ps_fma(ZEXT1632(auVar310),auVar304,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data +
                                                        lVar201 + lVar208 * 2 + 0x20));
                            auVar595 = vhaddps_avx(ZEXT1632(auVar268),ZEXT1632(auVar310));
                            auVar268 = vfmadd231ps_fma(auVar1218._0_32_,auVar613,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data +
                                                        lVar201 + lVar208 + 0x40));
                            auVar268 = vfmadd231ps_fma(ZEXT1632(auVar268),auVar594,
                                                       *(undefined1 (*) [32])
                                                        ((long)local_920.data +
                                                        lVar201 + lVar208 * 2 + 0x40));
                            in_ZMM12 = ZEXT1664(auVar268);
                            auVar1112 = vhaddps_avx(ZEXT1632(auVar268),
                                                    SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                            auVar595 = vhaddps_avx(auVar595,auVar1112);
                            auVar534._0_4_ = auVar595._16_4_ + auVar595._0_4_;
                            auVar534._4_4_ = auVar595._20_4_ + auVar595._4_4_;
                            auVar534._8_4_ = auVar595._24_4_ + auVar595._8_4_;
                            auVar534._12_4_ = auVar595._28_4_ + auVar595._12_4_;
                            auVar268 = vshufpd_avx(auVar534,auVar534,1);
                            auVar668._0_4_ = auVar268._0_4_ + auVar534._0_4_;
                            auVar668._4_4_ = auVar268._4_4_ + auVar534._4_4_;
                            auVar668._8_4_ = auVar268._8_4_ + auVar534._8_4_;
                            auVar668._12_4_ = auVar268._12_4_ + auVar534._12_4_;
                            auVar268 = vmovshdup_avx(auVar668);
                            fVar869 = auVar268._0_4_ + *pfVar206;
                            in_ZMM11 = ZEXT464((uint)fVar869);
                            fVar869 = fVar869 + auVar668._0_4_;
                            in_ZMM10 = ZEXT464((uint)fVar869);
                            *pfVar206 = fVar869;
                            pfVar206 = pfVar206 + 1;
                            lVar201 = lVar201 + 0x20;
                          }
                          lVar256 = lVar256 + lVar208;
                        }
                        pfVar197 = pfVar197 + 0x48;
                        lVar234 = lVar234 + local_920.cstep * local_920.elemsize;
                      }
                      pvVar228 = (void *)((long)pvVar228 + lVar200);
                    }
                    pLVar233 = this->activation;
                    goto LAB_001c686b;
                  }
                  if (bVar186 && iVar258 == 4) {
                    bVar186 = (auVar945._0_4_ ^ 3) != 0 || (auVar945._4_4_ ^ 3) != 0;
                    if ((iVar249 != 1 || iVar257 != 1) ||
                        ((bVar186 || uVar244 != 0) || uVar247 != 0)) {
                      if (((bVar186 || uVar244 != 0) || uVar247 != 0) ||
                          (iVar257 != 2 || iVar249 != 2)) goto LAB_001c3122;
                      iVar187 = top_blob->w;
                      iVar257 = top_blob->h;
                      iVar188 = top_blob->c;
                      if (iVar257 < 1) {
                        iVar257 = 0;
                      }
                      uVar210 = (ulong)(uint)local_920.c;
                      if (local_920.c < 1) {
                        uVar210 = 0;
                      }
                      pvVar204 = (this->super_Convolution).bias_data.data;
                      uVar209 = (ulong)(uint)(iVar188 >> 1);
                      if (iVar188 >> 1 < 1) {
                        uVar209 = 0;
                      }
                      lVar200 = (long)((local_920.w - iVar187) * 2);
                      lVar208 = lVar200 * 4;
                      for (uVar229 = 0; uVar229 != uVar209; uVar229 = uVar229 + 1) {
                        uVar237 = (long)top_blob->h * (long)top_blob->w;
                        uVar196 = top_blob->elemsize;
                        uVar242 = (uVar196 * uVar237 + 0xf & 0xfffffffffffffff0) / uVar196;
                        if (top_blob->dims == 4) {
                          uVar242 = uVar237;
                        }
                        lVar234 = uVar229 * 2 + 1;
                        if (pvVar204 == (void *)0x0) {
                          auVar268 = ZEXT816(0) << 0x40;
                          uVar266 = 0;
                          uVar306 = 0;
                        }
                        else {
                          auVar268 = *(undefined1 (*) [16])((long)pvVar204 + uVar229 * 0x20);
                          puVar224 = (undefined8 *)((long)pvVar204 + lVar234 * 0x10);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                        }
                        lVar256 = uVar196 * top_blob->cstep;
                        pauVar238 = (undefined1 (*) [16])
                                    (lVar256 * uVar229 * 2 + (long)top_blob->data);
                        puVar224 = (undefined8 *)(lVar256 * lVar234 + (long)top_blob->data);
                        iVar258 = (int)uVar242 * top_blob->d;
                        pauVar226 = pauVar238;
                        iVar239 = iVar258;
                        if (iVar258 < 1) {
                          iVar258 = 0;
                          iVar239 = iVar258;
                        }
                        while (bVar186 = iVar258 != 0, iVar258 = iVar258 + -1, puVar214 = puVar224,
                              bVar186) {
                          *pauVar226 = auVar268;
                          pauVar226 = pauVar226 + 1;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *puVar214 = uVar266;
                          puVar214[1] = uVar306;
                          puVar214 = puVar214 + 2;
                        }
                        pvVar251 = (this->weight_data_tm).data;
                        lVar256 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                        pauVar260 = (undefined1 (*) [16])(uVar229 * 2 * lVar256 + (long)pvVar251);
                        pauVar226 = (undefined1 (*) [16])(lVar256 * lVar234 + (long)pvVar251);
                        for (uVar196 = 0; uVar196 != uVar210; uVar196 = uVar196 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar196 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar234 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          auVar1233 = *pauVar260;
                          auVar1143 = *pauVar260;
                          auVar1136 = *pauVar260;
                          auVar1085 = *pauVar260;
                          auVar1259 = *pauVar260;
                          pauVar240 = pauVar260 + 1;
                          uStack_778 = *(undefined8 *)(pauVar260[1] + 8);
                          auVar1234 = *pauVar240;
                          auVar1137 = *pauVar240;
                          auVar1135 = *pauVar240;
                          local_780._0_4_ = (int)*(undefined8 *)*pauVar240;
                          local_780._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          auVar310 = pauVar260[2];
                          local_980._0_16_ = auVar310;
                          pauVar240 = pauVar260 + 3;
                          auVar161 = *(undefined1 (*) [12])*pauVar240;
                          auVar158 = *(undefined1 (*) [12])*pauVar240;
                          auVar155 = *(undefined1 (*) [12])*pauVar240;
                          auVar152 = *(undefined1 (*) [12])*pauVar240;
                          auVar149 = *(undefined1 (*) [12])*pauVar240;
                          auVar146 = *(undefined1 (*) [12])*pauVar240;
                          uStack_b74 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar260[3] + 8) >> 0x20);
                          pauVar240 = pauVar260 + 4;
                          uStack_838 = *(undefined8 *)(pauVar260[4] + 8);
                          auVar1237 = *pauVar240;
                          auVar1140 = *pauVar240;
                          auVar1083 = *pauVar240;
                          auVar1076 = *pauVar240;
                          local_840._0_4_ = (uint)*(undefined8 *)*pauVar240;
                          local_840._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          pauVar240 = pauVar260 + 5;
                          uStack_a38 = *(undefined8 *)(pauVar260[5] + 8);
                          auVar1238 = *pauVar240;
                          auVar1141 = *pauVar240;
                          auVar1087 = *pauVar240;
                          auVar1080 = *pauVar240;
                          auVar1077 = *pauVar240;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar240;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          pauVar240 = pauVar260 + 6;
                          auVar162 = *(undefined1 (*) [12])*pauVar240;
                          auVar159 = *(undefined1 (*) [12])*pauVar240;
                          auVar156 = *(undefined1 (*) [12])*pauVar240;
                          auVar153 = *(undefined1 (*) [12])*pauVar240;
                          auVar151 = *(undefined1 (*) [12])*pauVar240;
                          auVar147 = *(undefined1 (*) [12])*pauVar240;
                          uStack_b34 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar260[6] + 8) >> 0x20);
                          pauVar240 = pauVar260 + 7;
                          uStack_a58 = *(undefined8 *)(pauVar260[7] + 8);
                          auVar1239 = *pauVar240;
                          auVar1142 = *pauVar240;
                          auVar1084 = *pauVar240;
                          auVar1081 = *pauVar240;
                          auVar1078 = *pauVar240;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar240;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          auVar945 = pauVar260[8];
                          local_7c0._0_16_ = auVar945;
                          uStack_a78 = *(undefined8 *)(*pauVar226 + 8);
                          auVar1235 = *pauVar226;
                          auVar1138 = *pauVar226;
                          auVar1086 = *pauVar226;
                          auVar1079 = *pauVar226;
                          auVar1074 = *pauVar226;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar226;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          pauVar240 = pauVar226 + 1;
                          uStack_a18 = *(undefined8 *)(pauVar226[1] + 8);
                          auVar1236 = *pauVar240;
                          auVar1232 = *pauVar240;
                          auVar1139 = *pauVar240;
                          auVar1082 = *pauVar240;
                          auVar1075 = *pauVar240;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar240;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          auVar309 = pauVar226[2];
                          local_a00._0_16_ = auVar309;
                          auVar534 = pauVar226[3];
                          _local_9c0 = auVar534;
                          auVar668 = pauVar226[4];
                          local_880._0_16_ = auVar668;
                          auVar413 = pauVar226[5];
                          local_9a0._0_16_ = auVar413;
                          pauVar240 = pauVar226 + 6;
                          auVar163 = *(undefined1 (*) [12])*pauVar240;
                          auVar160 = *(undefined1 (*) [12])*pauVar240;
                          auVar157 = *(undefined1 (*) [12])*pauVar240;
                          auVar154 = *(undefined1 (*) [12])*pauVar240;
                          auVar150 = *(undefined1 (*) [12])*pauVar240;
                          auVar148 = *(undefined1 (*) [12])*pauVar240;
                          uStack_ad4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar226[6] + 8) >> 0x20);
                          auVar1168 = pauVar226[7];
                          local_960._0_16_ = auVar1168;
                          auVar268 = pauVar226[8];
                          local_760 = auVar268._0_4_;
                          iStack_75c = auVar268._4_4_;
                          uStack_758 = auVar268._8_8_;
                          puVar214 = puVar224;
                          pauVar240 = pauVar238;
                          for (iVar239 = 0; iVar239 != iVar257; iVar239 = iVar239 + 1) {
                            lVar256 = 0;
                            puVar231 = puVar214;
                            pauVar225 = pauVar240;
                            for (iVar258 = 0; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar519._4_4_ = uVar211;
                              auVar519._0_4_ = uVar211;
                              auVar519._8_4_ = uVar211;
                              auVar519._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar756._4_4_ = uVar211;
                              auVar756._0_4_ = uVar211;
                              auVar756._8_4_ = uVar211;
                              auVar756._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar408._4_4_ = uVar211;
                              auVar408._0_4_ = uVar211;
                              auVar408._8_4_ = uVar211;
                              auVar408._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar631._4_4_ = uVar211;
                              auVar631._0_4_ = uVar211;
                              auVar631._8_4_ = uVar211;
                              auVar631._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (*pauVar240 + lVar256 * 2),auVar519,
                                                          auVar1259);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar756,auVar1135);
                              auVar1240 = vfmadd213ps_fma(auVar519,auVar1074,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1075,auVar756);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar757._4_4_ = uVar211;
                              auVar757._0_4_ = uVar211;
                              auVar757._8_4_ = uVar211;
                              auVar757._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar408,auVar310);
                              auVar33._12_4_ = uStack_b74;
                              auVar33._0_12_ = auVar146;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar631,auVar33);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar408,auVar309);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar631,auVar534);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar632._4_4_ = uVar211;
                              auVar632._0_4_ = uVar211;
                              auVar632._8_4_ = uVar211;
                              auVar632._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar757,auVar1076);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar668,auVar757);
                              uVar211 = *(undefined4 *)(lVar234 + lVar256);
                              auVar758._4_4_ = uVar211;
                              auVar758._0_4_ = uVar211;
                              auVar758._8_4_ = uVar211;
                              auVar758._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar632,auVar1077);
                              auVar75._12_4_ = uStack_b34;
                              auVar75._0_12_ = auVar147;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar758,auVar75);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar632,auVar413);
                              auVar19._12_4_ = uStack_ad4;
                              auVar19._0_12_ = auVar148;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar758,auVar19);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar256);
                              auVar759._4_4_ = uVar211;
                              auVar759._0_4_ = uVar211;
                              auVar759._8_4_ = uVar211;
                              auVar759._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar759,auVar1078);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1168,auVar759);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar256);
                              auVar760._4_4_ = uVar211;
                              auVar760._0_4_ = uVar211;
                              auVar760._8_4_ = uVar211;
                              auVar760._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar760,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar760,auVar268);
                              *(undefined1 (*) [16])(*pauVar240 + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2) = auVar1240;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar520._4_4_ = uVar211;
                              auVar520._0_4_ = uVar211;
                              auVar520._8_4_ = uVar211;
                              auVar520._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (pauVar240[1] + lVar256 * 2),auVar408,
                                                          auVar1259);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar520,auVar1135);
                              auVar1240 = vfmadd213ps_fma(auVar408,auVar1079,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2 + 0x10));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1075,auVar520);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar521._4_4_ = uVar211;
                              auVar521._0_4_ = uVar211;
                              auVar521._8_4_ = uVar211;
                              auVar521._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar521,auVar310);
                              auVar34._12_4_ = uStack_b74;
                              auVar34._0_12_ = auVar149;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar632,auVar34);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar521,auVar309);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar632,auVar534);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar633._4_4_ = uVar211;
                              auVar633._0_4_ = uVar211;
                              auVar633._8_4_ = uVar211;
                              auVar633._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar633,auVar1076);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar668,auVar633);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar634._4_4_ = uVar211;
                              auVar634._0_4_ = uVar211;
                              auVar634._8_4_ = uVar211;
                              auVar634._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar634,auVar1080);
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar760,auVar75);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar634,auVar413);
                              auVar114._12_4_ = uStack_ad4;
                              auVar114._0_12_ = auVar150;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar114,auVar760);
                              uVar211 = *(undefined4 *)(lVar234 + 0xc + lVar256);
                              auVar761._4_4_ = uVar211;
                              auVar761._0_4_ = uVar211;
                              auVar761._8_4_ = uVar211;
                              auVar761._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar761,auVar1081);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1168,auVar761);
                              uVar211 = *(undefined4 *)(lVar234 + 0x10 + lVar256);
                              auVar762._4_4_ = uVar211;
                              auVar762._0_4_ = uVar211;
                              auVar762._8_4_ = uVar211;
                              auVar762._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar762,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar762,auVar268);
                              *(undefined1 (*) [16])(pauVar240[1] + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2 + 0x10) =
                                   auVar1240;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x14);
                              auVar409._4_4_ = uVar211;
                              auVar409._0_4_ = uVar211;
                              auVar409._8_4_ = uVar211;
                              auVar409._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (pauVar240[2] + lVar256 * 2),auVar521,
                                                          auVar1259);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar409,auVar1135);
                              auVar1240 = vfmadd213ps_fma(auVar521,auVar1079,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2 + 0x20));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1082,auVar409);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x18);
                              auVar410._4_4_ = uVar211;
                              auVar410._0_4_ = uVar211;
                              auVar410._8_4_ = uVar211;
                              auVar410._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar410,auVar310);
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar634,auVar34);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar410,auVar309);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar534,auVar634);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x14);
                              auVar635._4_4_ = uVar211;
                              auVar635._0_4_ = uVar211;
                              auVar635._8_4_ = uVar211;
                              auVar635._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar635,auVar1083);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar668,auVar635);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x18);
                              auVar636._4_4_ = uVar211;
                              auVar636._0_4_ = uVar211;
                              auVar636._8_4_ = uVar211;
                              auVar636._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar636,auVar1080);
                              auVar76._12_4_ = uStack_b34;
                              auVar76._0_12_ = auVar151;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar762,auVar76);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar636,auVar413);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar114,auVar762);
                              uVar211 = *(undefined4 *)(lVar234 + 0x14 + lVar256);
                              auVar763._4_4_ = uVar211;
                              auVar763._0_4_ = uVar211;
                              auVar763._8_4_ = uVar211;
                              auVar763._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar763,auVar1084);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1168,auVar763);
                              uVar211 = *(undefined4 *)(lVar234 + 0x18 + lVar256);
                              auVar764._4_4_ = uVar211;
                              auVar764._0_4_ = uVar211;
                              auVar764._8_4_ = uVar211;
                              auVar764._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar764,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar764,auVar268);
                              *(undefined1 (*) [16])(pauVar240[2] + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2 + 0x20) =
                                   auVar1240;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x1c);
                              auVar876._4_4_ = uVar211;
                              auVar876._0_4_ = uVar211;
                              auVar876._8_4_ = uVar211;
                              auVar876._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (pauVar240[3] + lVar256 * 2),auVar410,
                                                          auVar1085);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar876,auVar1135);
                              auVar1240 = vfmadd213ps_fma(auVar410,auVar1086,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2 + 0x30));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1082,auVar876);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x20);
                              auVar877._4_4_ = uVar211;
                              auVar877._0_4_ = uVar211;
                              auVar877._8_4_ = uVar211;
                              auVar877._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar877,auVar310);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar309,auVar877);
                              auVar35._12_4_ = uStack_b74;
                              auVar35._0_12_ = auVar152;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar636,auVar35);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar534,auVar636);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x1c);
                              auVar637._4_4_ = uVar211;
                              auVar637._0_4_ = uVar211;
                              auVar637._8_4_ = uVar211;
                              auVar637._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar637,auVar1083);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar637,auVar668);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x20);
                              auVar638._4_4_ = uVar211;
                              auVar638._0_4_ = uVar211;
                              auVar638._8_4_ = uVar211;
                              auVar638._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar638,auVar1087);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar413,auVar638);
                              auVar18._12_4_ = uStack_b34;
                              auVar18._0_12_ = auVar153;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar764,auVar18);
                              auVar115._12_4_ = uStack_ad4;
                              auVar115._0_12_ = auVar154;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar764,auVar115);
                              uVar211 = *(undefined4 *)(lVar234 + 0x1c + lVar256);
                              auVar639._4_4_ = uVar211;
                              auVar639._0_4_ = uVar211;
                              auVar639._8_4_ = uVar211;
                              auVar639._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar639,auVar1084);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar1168,auVar639);
                              uVar211 = *(undefined4 *)(lVar234 + 0x20 + lVar256);
                              auVar640._4_4_ = uVar211;
                              auVar640._0_4_ = uVar211;
                              auVar640._8_4_ = uVar211;
                              auVar640._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar640,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar268,auVar640);
                              *(undefined1 (*) [16])(pauVar240[3] + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2 + 0x30) =
                                   auVar1240;
                              pauVar225 = pauVar225 + 4;
                              puVar231 = puVar231 + 8;
                              lVar256 = lVar256 + 0x20;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar522._4_4_ = uVar211;
                              auVar522._0_4_ = uVar211;
                              auVar522._8_4_ = uVar211;
                              auVar522._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar765._4_4_ = uVar211;
                              auVar765._0_4_ = uVar211;
                              auVar765._8_4_ = uVar211;
                              auVar765._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar411._4_4_ = uVar211;
                              auVar411._0_4_ = uVar211;
                              auVar411._8_4_ = uVar211;
                              auVar411._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar641._4_4_ = uVar211;
                              auVar641._0_4_ = uVar211;
                              auVar641._8_4_ = uVar211;
                              auVar641._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (*pauVar240 + lVar256 * 2),auVar522,
                                                          auVar1136);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar765,auVar1137);
                              auVar1240 = vfmadd213ps_fma(auVar522,auVar1138,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar765,auVar1139);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar766._4_4_ = uVar211;
                              auVar766._0_4_ = uVar211;
                              auVar766._8_4_ = uVar211;
                              auVar766._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar411,auVar310);
                              auVar36._12_4_ = uStack_b74;
                              auVar36._0_12_ = auVar155;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar641,auVar36);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar411,auVar309);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar534,auVar641);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar642._4_4_ = uVar211;
                              auVar642._0_4_ = uVar211;
                              auVar642._8_4_ = uVar211;
                              auVar642._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar766,auVar1140);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar766,auVar668);
                              uVar211 = *(undefined4 *)(lVar234 + lVar256);
                              auVar767._4_4_ = uVar211;
                              auVar767._0_4_ = uVar211;
                              auVar767._8_4_ = uVar211;
                              auVar767._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar642,auVar1141);
                              auVar77._12_4_ = uStack_b34;
                              auVar77._0_12_ = auVar156;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar767,auVar77);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar642,auVar413);
                              auVar116._12_4_ = uStack_ad4;
                              auVar116._0_12_ = auVar157;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar767,auVar116);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar256);
                              auVar768._4_4_ = uVar211;
                              auVar768._0_4_ = uVar211;
                              auVar768._8_4_ = uVar211;
                              auVar768._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar768,auVar1142);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar768,auVar1168);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar256);
                              auVar769._4_4_ = uVar211;
                              auVar769._0_4_ = uVar211;
                              auVar769._8_4_ = uVar211;
                              auVar769._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar769,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar769,auVar268);
                              *(undefined1 (*) [16])(*pauVar240 + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2) = auVar1240;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0xc);
                              auVar878._4_4_ = uVar211;
                              auVar878._0_4_ = uVar211;
                              auVar878._8_4_ = uVar211;
                              auVar878._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (pauVar240[1] + lVar256 * 2),auVar411,
                                                          auVar1143);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar878,auVar1137);
                              auVar1240 = vfmadd213ps_fma(auVar411,auVar1138,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2 + 0x10));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar878,auVar1232);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 0x10);
                              auVar879._4_4_ = uVar211;
                              auVar879._0_4_ = uVar211;
                              auVar879._8_4_ = uVar211;
                              auVar879._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar879,auVar310);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar309,auVar879);
                              auVar37._12_4_ = uStack_b74;
                              auVar37._0_12_ = auVar158;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar642,auVar37);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar534,auVar642);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0xc);
                              auVar643._4_4_ = uVar211;
                              auVar643._0_4_ = uVar211;
                              auVar643._8_4_ = uVar211;
                              auVar643._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar643,auVar1140);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar643,auVar668);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 0x10);
                              auVar644._4_4_ = uVar211;
                              auVar644._0_4_ = uVar211;
                              auVar644._8_4_ = uVar211;
                              auVar644._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar644,auVar1141);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar413,auVar644);
                              auVar78._12_4_ = uStack_b34;
                              auVar78._0_12_ = auVar159;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar769,auVar78);
                              auVar117._12_4_ = uStack_ad4;
                              auVar117._0_12_ = auVar160;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar769,auVar117);
                              uVar211 = *(undefined4 *)(lVar234 + 0xc + lVar256);
                              auVar645._4_4_ = uVar211;
                              auVar645._0_4_ = uVar211;
                              auVar645._8_4_ = uVar211;
                              auVar645._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar645,auVar1142);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar645,auVar1168);
                              uVar211 = *(undefined4 *)(lVar234 + 0x10 + lVar256);
                              auVar646._4_4_ = uVar211;
                              auVar646._0_4_ = uVar211;
                              auVar646._8_4_ = uVar211;
                              auVar646._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar646,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar268,auVar646);
                              *(undefined1 (*) [16])(pauVar240[1] + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2 + 0x10) =
                                   auVar1240;
                              pauVar225 = pauVar225 + 2;
                              puVar231 = puVar231 + 4;
                              lVar256 = lVar256 + 0x10;
                            }
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256);
                              auVar412._4_4_ = uVar211;
                              auVar412._0_4_ = uVar211;
                              auVar412._8_4_ = uVar211;
                              auVar412._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 4);
                              auVar647._4_4_ = uVar211;
                              auVar647._0_4_ = uVar211;
                              auVar647._8_4_ = uVar211;
                              auVar647._12_4_ = uVar211;
                              auVar1240 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                           (*pauVar240 + lVar256 * 2),auVar412,
                                                          auVar1233);
                              auVar1241 = vfmadd231ps_fma(auVar1240,auVar647,auVar1234);
                              auVar1240 = vfmadd213ps_fma(auVar412,auVar1235,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar214 + lVar256 * 2));
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar647,auVar1236);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar256 + 8);
                              auVar648._4_4_ = uVar211;
                              auVar648._0_4_ = uVar211;
                              auVar648._8_4_ = uVar211;
                              auVar648._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar648,auVar310);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar648,auVar309);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256);
                              auVar649._4_4_ = uVar211;
                              auVar649._0_4_ = uVar211;
                              auVar649._8_4_ = uVar211;
                              auVar649._12_4_ = uVar211;
                              auVar38._12_4_ = uStack_b74;
                              auVar38._0_12_ = auVar161;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar649,auVar38);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar649,auVar534);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 4);
                              auVar650._4_4_ = uVar211;
                              auVar650._0_4_ = uVar211;
                              auVar650._8_4_ = uVar211;
                              auVar650._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar650,auVar1237);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar650,auVar668);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar256 + 8);
                              auVar651._4_4_ = uVar211;
                              auVar651._0_4_ = uVar211;
                              auVar651._8_4_ = uVar211;
                              auVar651._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar651,auVar1238);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar651,auVar413);
                              uVar211 = *(undefined4 *)(lVar234 + lVar256);
                              auVar652._4_4_ = uVar211;
                              auVar652._0_4_ = uVar211;
                              auVar652._8_4_ = uVar211;
                              auVar652._12_4_ = uVar211;
                              auVar79._12_4_ = uStack_b34;
                              auVar79._0_12_ = auVar162;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar652,auVar79);
                              auVar118._12_4_ = uStack_ad4;
                              auVar118._0_12_ = auVar163;
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar652,auVar118);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar256);
                              auVar653._4_4_ = uVar211;
                              auVar653._0_4_ = uVar211;
                              auVar653._8_4_ = uVar211;
                              auVar653._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar653,auVar1239);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar653,auVar1168);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar256);
                              auVar654._4_4_ = uVar211;
                              auVar654._0_4_ = uVar211;
                              auVar654._8_4_ = uVar211;
                              auVar654._12_4_ = uVar211;
                              auVar1241 = vfmadd231ps_fma(auVar1241,auVar654,auVar945);
                              auVar1240 = vfmadd231ps_fma(auVar1240,auVar654,auVar268);
                              *(undefined1 (*) [16])(*pauVar240 + lVar256 * 2) = auVar1241;
                              *(undefined1 (*) [16])((long)puVar214 + lVar256 * 2) = auVar1240;
                              pauVar225 = pauVar225 + 1;
                              puVar231 = puVar231 + 2;
                              lVar256 = lVar256 + 8;
                            }
                            piVar222 = (int *)((long)piVar222 + lVar256 + lVar208);
                            piVar255 = (int *)((long)piVar255 + lVar256 + lVar208);
                            lVar234 = lVar234 + lVar208 + lVar256;
                            puVar214 = puVar231;
                            pauVar240 = pauVar225;
                          }
                          pauVar260 = pauVar260 + 9;
                          pauVar226 = pauVar226 + 9;
                        }
                      }
                      for (uVar209 = (long)iVar188 & 0xfffffffffffffffe;
                          (long)uVar209 < (long)iVar188; uVar209 = uVar209 + 1) {
                        uVar242 = (long)top_blob->h * (long)top_blob->w;
                        uVar229 = top_blob->elemsize;
                        uVar196 = (uVar229 * uVar242 + 0xf & 0xfffffffffffffff0) / uVar229;
                        if (top_blob->dims == 4) {
                          uVar196 = uVar242;
                        }
                        if (pvVar204 == (void *)0x0) {
                          uVar266 = 0;
                          uVar306 = 0;
                        }
                        else {
                          puVar224 = (undefined8 *)((long)pvVar204 + uVar209 * 0x10);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                        }
                        pauVar238 = (undefined1 (*) [16])
                                    (top_blob->cstep * uVar209 * uVar229 + (long)top_blob->data);
                        iVar239 = (int)uVar196 * top_blob->d;
                        pauVar226 = pauVar238;
                        if (iVar239 < 1) {
                          iVar239 = 0;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *(undefined8 *)*pauVar226 = uVar266;
                          *(undefined8 *)(*pauVar226 + 8) = uVar306;
                          pauVar226 = pauVar226 + 1;
                        }
                        pauVar226 = (undefined1 (*) [16])
                                    ((this->weight_data_tm).cstep * uVar209 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar229 * local_920.elemsize +
                                            (long)local_920.data);
                          auVar268 = *pauVar226;
                          auVar310 = pauVar226[1];
                          auVar945 = pauVar226[2];
                          auVar309 = pauVar226[3];
                          auVar534 = pauVar226[4];
                          auVar668 = pauVar226[5];
                          auVar413 = pauVar226[6];
                          auVar1168 = pauVar226[7];
                          auVar1259 = pauVar226[8];
                          pauVar260 = pauVar238;
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar234 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          for (iVar239 = 0; iVar239 != iVar257; iVar239 = iVar239 + 1) {
                            piVar227 = piVar222 + lVar200;
                            piVar223 = piVar255 + lVar200;
                            lVar256 = lVar208 + lVar234;
                            lVar201 = 0;
                            pauVar240 = pauVar260;
                            for (iVar258 = 0; iVar258 + 7 < iVar187; iVar258 = iVar258 + 8) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201);
                              auVar1135._4_4_ = uVar211;
                              auVar1135._0_4_ = uVar211;
                              auVar1135._8_4_ = uVar211;
                              auVar1135._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 4);
                              auVar1232._4_4_ = uVar211;
                              auVar1232._0_4_ = uVar211;
                              auVar1232._8_4_ = uVar211;
                              auVar1232._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 8);
                              auVar1074._4_4_ = uVar211;
                              auVar1074._0_4_ = uVar211;
                              auVar1074._8_4_ = uVar211;
                              auVar1074._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1135,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (*pauVar260 + lVar201 * 2));
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201);
                              auVar1314._4_4_ = uVar211;
                              auVar1314._0_4_ = uVar211;
                              auVar1314._8_4_ = uVar211;
                              auVar1314._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1232);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 4);
                              auVar1233._4_4_ = uVar211;
                              auVar1233._0_4_ = uVar211;
                              auVar1233._8_4_ = uVar211;
                              auVar1233._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1074,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1314);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 8);
                              auVar1315._4_4_ = uVar211;
                              auVar1315._0_4_ = uVar211;
                              auVar1315._8_4_ = uVar211;
                              auVar1315._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1233);
                              uVar211 = *(undefined4 *)(lVar234 + lVar201);
                              auVar1234._4_4_ = uVar211;
                              auVar1234._0_4_ = uVar211;
                              auVar1234._8_4_ = uVar211;
                              auVar1234._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1315,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1234);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar201);
                              auVar1235._4_4_ = uVar211;
                              auVar1235._0_4_ = uVar211;
                              auVar1235._8_4_ = uVar211;
                              auVar1235._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1235);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar201);
                              auVar1236._4_4_ = uVar211;
                              auVar1236._0_4_ = uVar211;
                              auVar1236._8_4_ = uVar211;
                              auVar1236._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1236,auVar1259);
                              *(undefined1 (*) [16])(*pauVar260 + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0xc);
                              auVar1136._4_4_ = uVar211;
                              auVar1136._0_4_ = uVar211;
                              auVar1136._8_4_ = uVar211;
                              auVar1136._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1074,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[1] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1136);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x10);
                              auVar1137._4_4_ = uVar211;
                              auVar1137._0_4_ = uVar211;
                              auVar1137._8_4_ = uVar211;
                              auVar1137._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1137,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1315);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0xc);
                              auVar1316._4_4_ = uVar211;
                              auVar1316._0_4_ = uVar211;
                              auVar1316._8_4_ = uVar211;
                              auVar1316._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1316);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x10);
                              auVar1317._4_4_ = uVar211;
                              auVar1317._0_4_ = uVar211;
                              auVar1317._8_4_ = uVar211;
                              auVar1317._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1317,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1236);
                              uVar211 = *(undefined4 *)(lVar234 + 0xc + lVar201);
                              auVar1237._4_4_ = uVar211;
                              auVar1237._0_4_ = uVar211;
                              auVar1237._8_4_ = uVar211;
                              auVar1237._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1237);
                              uVar211 = *(undefined4 *)(lVar234 + 0x10 + lVar201);
                              auVar1403._4_4_ = uVar211;
                              auVar1403._0_4_ = uVar211;
                              auVar1403._8_4_ = uVar211;
                              auVar1403._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1403,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[1] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x14);
                              auVar1075._4_4_ = uVar211;
                              auVar1075._0_4_ = uVar211;
                              auVar1075._8_4_ = uVar211;
                              auVar1075._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1137,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[2] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1075);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x18);
                              auVar1238._4_4_ = uVar211;
                              auVar1238._0_4_ = uVar211;
                              auVar1238._8_4_ = uVar211;
                              auVar1238._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1238,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1317);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x14);
                              auVar1076._4_4_ = uVar211;
                              auVar1076._0_4_ = uVar211;
                              auVar1076._8_4_ = uVar211;
                              auVar1076._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1076);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x18);
                              auVar1318._4_4_ = uVar211;
                              auVar1318._0_4_ = uVar211;
                              auVar1318._8_4_ = uVar211;
                              auVar1318._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1318,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1403);
                              uVar211 = *(undefined4 *)(lVar234 + 0x14 + lVar201);
                              auVar1077._4_4_ = uVar211;
                              auVar1077._0_4_ = uVar211;
                              auVar1077._8_4_ = uVar211;
                              auVar1077._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1077);
                              uVar211 = *(undefined4 *)(lVar234 + 0x18 + lVar201);
                              auVar1404._4_4_ = uVar211;
                              auVar1404._0_4_ = uVar211;
                              auVar1404._8_4_ = uVar211;
                              auVar1404._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1404,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[2] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x1c);
                              auVar1078._4_4_ = uVar211;
                              auVar1078._0_4_ = uVar211;
                              auVar1078._8_4_ = uVar211;
                              auVar1078._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1238,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[3] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1078);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x20);
                              auVar1079._4_4_ = uVar211;
                              auVar1079._0_4_ = uVar211;
                              auVar1079._8_4_ = uVar211;
                              auVar1079._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1079,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1318);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x1c);
                              auVar1138._4_4_ = uVar211;
                              auVar1138._0_4_ = uVar211;
                              auVar1138._8_4_ = uVar211;
                              auVar1138._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1138);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x20);
                              auVar1319._4_4_ = uVar211;
                              auVar1319._0_4_ = uVar211;
                              auVar1319._8_4_ = uVar211;
                              auVar1319._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1319,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1404);
                              uVar211 = *(undefined4 *)(lVar234 + 0x1c + lVar201);
                              auVar1139._4_4_ = uVar211;
                              auVar1139._0_4_ = uVar211;
                              auVar1139._8_4_ = uVar211;
                              auVar1139._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1139);
                              uVar211 = *(undefined4 *)(lVar234 + 0x20 + lVar201);
                              auVar1405._4_4_ = uVar211;
                              auVar1405._0_4_ = uVar211;
                              auVar1405._8_4_ = uVar211;
                              auVar1405._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1405,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[3] + lVar201 * 2) = auVar1135;
                              auVar1135 = vfmadd213ps_fma(auVar1079,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[4] + lVar201 * 2));
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x24);
                              auVar1140._4_4_ = uVar211;
                              auVar1140._0_4_ = uVar211;
                              auVar1140._8_4_ = uVar211;
                              auVar1140._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1140);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x28);
                              auVar1141._4_4_ = uVar211;
                              auVar1141._0_4_ = uVar211;
                              auVar1141._8_4_ = uVar211;
                              auVar1141._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1141,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1319);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x24);
                              auVar1239._4_4_ = uVar211;
                              auVar1239._0_4_ = uVar211;
                              auVar1239._8_4_ = uVar211;
                              auVar1239._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1239);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x28);
                              auVar1240._4_4_ = uVar211;
                              auVar1240._0_4_ = uVar211;
                              auVar1240._8_4_ = uVar211;
                              auVar1240._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1240,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1405);
                              uVar211 = *(undefined4 *)(lVar234 + 0x24 + lVar201);
                              auVar1320._4_4_ = uVar211;
                              auVar1320._0_4_ = uVar211;
                              auVar1320._8_4_ = uVar211;
                              auVar1320._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1320);
                              uVar211 = *(undefined4 *)(lVar234 + 0x28 + lVar201);
                              auVar1321._4_4_ = uVar211;
                              auVar1321._0_4_ = uVar211;
                              auVar1321._8_4_ = uVar211;
                              auVar1321._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1321,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[4] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x2c);
                              auVar1080._4_4_ = uVar211;
                              auVar1080._0_4_ = uVar211;
                              auVar1080._8_4_ = uVar211;
                              auVar1080._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1141,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[5] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1080);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x30);
                              auVar1081._4_4_ = uVar211;
                              auVar1081._0_4_ = uVar211;
                              auVar1081._8_4_ = uVar211;
                              auVar1081._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1081,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1240);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x2c);
                              auVar1241._4_4_ = uVar211;
                              auVar1241._0_4_ = uVar211;
                              auVar1241._8_4_ = uVar211;
                              auVar1241._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1241);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x30);
                              auVar1242._4_4_ = uVar211;
                              auVar1242._0_4_ = uVar211;
                              auVar1242._8_4_ = uVar211;
                              auVar1242._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1242,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1321);
                              uVar211 = *(undefined4 *)(lVar234 + 0x2c + lVar201);
                              auVar1322._4_4_ = uVar211;
                              auVar1322._0_4_ = uVar211;
                              auVar1322._8_4_ = uVar211;
                              auVar1322._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1322);
                              uVar211 = *(undefined4 *)(lVar234 + 0x30 + lVar201);
                              auVar1323._4_4_ = uVar211;
                              auVar1323._0_4_ = uVar211;
                              auVar1323._8_4_ = uVar211;
                              auVar1323._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1323,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[5] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x34);
                              auVar1142._4_4_ = uVar211;
                              auVar1142._0_4_ = uVar211;
                              auVar1142._8_4_ = uVar211;
                              auVar1142._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1081,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[6] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1142);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x38);
                              auVar1143._4_4_ = uVar211;
                              auVar1143._0_4_ = uVar211;
                              auVar1143._8_4_ = uVar211;
                              auVar1143._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1143,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1242);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x34);
                              auVar1243._4_4_ = uVar211;
                              auVar1243._0_4_ = uVar211;
                              auVar1243._8_4_ = uVar211;
                              auVar1243._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1243);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x38);
                              auVar1244._4_4_ = uVar211;
                              auVar1244._0_4_ = uVar211;
                              auVar1244._8_4_ = uVar211;
                              auVar1244._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1244,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1323);
                              uVar211 = *(undefined4 *)(lVar234 + 0x34 + lVar201);
                              auVar1324._4_4_ = uVar211;
                              auVar1324._0_4_ = uVar211;
                              auVar1324._8_4_ = uVar211;
                              auVar1324._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1324);
                              uVar211 = *(undefined4 *)(lVar234 + 0x38 + lVar201);
                              auVar1325._4_4_ = uVar211;
                              auVar1325._0_4_ = uVar211;
                              auVar1325._8_4_ = uVar211;
                              auVar1325._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1325,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[6] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x3c);
                              auVar1082._4_4_ = uVar211;
                              auVar1082._0_4_ = uVar211;
                              auVar1082._8_4_ = uVar211;
                              auVar1082._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1143,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[7] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1082);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x40);
                              auVar1083._4_4_ = uVar211;
                              auVar1083._0_4_ = uVar211;
                              auVar1083._8_4_ = uVar211;
                              auVar1083._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar945,auVar1083);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1244);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x3c);
                              auVar1084._4_4_ = uVar211;
                              auVar1084._0_4_ = uVar211;
                              auVar1084._8_4_ = uVar211;
                              auVar1084._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1084);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x40);
                              auVar1085._4_4_ = uVar211;
                              auVar1085._0_4_ = uVar211;
                              auVar1085._8_4_ = uVar211;
                              auVar1085._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar668,auVar1085);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1325);
                              uVar211 = *(undefined4 *)(lVar234 + 0x3c + lVar201);
                              auVar1086._4_4_ = uVar211;
                              auVar1086._0_4_ = uVar211;
                              auVar1086._8_4_ = uVar211;
                              auVar1086._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1086);
                              uVar211 = *(undefined4 *)(lVar234 + 0x40 + lVar201);
                              auVar1087._4_4_ = uVar211;
                              auVar1087._0_4_ = uVar211;
                              auVar1087._8_4_ = uVar211;
                              auVar1087._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1259,auVar1087);
                              *(undefined1 (*) [16])(pauVar260[7] + lVar201 * 2) = auVar1135;
                              pauVar240 = pauVar240 + 8;
                              lVar201 = lVar201 + 0x40;
                              piVar227 = piVar227 + 0x10;
                              piVar223 = piVar223 + 0x10;
                              lVar256 = lVar256 + 0x40;
                            }
                            for (; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201);
                              auVar1144._4_4_ = uVar211;
                              auVar1144._0_4_ = uVar211;
                              auVar1144._8_4_ = uVar211;
                              auVar1144._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 4);
                              auVar1245._4_4_ = uVar211;
                              auVar1245._0_4_ = uVar211;
                              auVar1245._8_4_ = uVar211;
                              auVar1245._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 8);
                              auVar1088._4_4_ = uVar211;
                              auVar1088._0_4_ = uVar211;
                              auVar1088._8_4_ = uVar211;
                              auVar1088._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1144,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (*pauVar260 + lVar201 * 2));
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201);
                              auVar1326._4_4_ = uVar211;
                              auVar1326._0_4_ = uVar211;
                              auVar1326._8_4_ = uVar211;
                              auVar1326._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1245);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 4);
                              auVar1246._4_4_ = uVar211;
                              auVar1246._0_4_ = uVar211;
                              auVar1246._8_4_ = uVar211;
                              auVar1246._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1088,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1326);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 8);
                              auVar1327._4_4_ = uVar211;
                              auVar1327._0_4_ = uVar211;
                              auVar1327._8_4_ = uVar211;
                              auVar1327._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1246);
                              uVar211 = *(undefined4 *)(lVar234 + lVar201);
                              auVar1247._4_4_ = uVar211;
                              auVar1247._0_4_ = uVar211;
                              auVar1247._8_4_ = uVar211;
                              auVar1247._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1327,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1247);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar201);
                              auVar1248._4_4_ = uVar211;
                              auVar1248._0_4_ = uVar211;
                              auVar1248._8_4_ = uVar211;
                              auVar1248._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1248);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar201);
                              auVar1249._4_4_ = uVar211;
                              auVar1249._0_4_ = uVar211;
                              auVar1249._8_4_ = uVar211;
                              auVar1249._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1249,auVar1259);
                              *(undefined1 (*) [16])(*pauVar260 + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0xc);
                              auVar1145._4_4_ = uVar211;
                              auVar1145._0_4_ = uVar211;
                              auVar1145._8_4_ = uVar211;
                              auVar1145._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1088,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[1] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1145);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x10);
                              auVar1146._4_4_ = uVar211;
                              auVar1146._0_4_ = uVar211;
                              auVar1146._8_4_ = uVar211;
                              auVar1146._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1146,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1327);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0xc);
                              auVar1328._4_4_ = uVar211;
                              auVar1328._0_4_ = uVar211;
                              auVar1328._8_4_ = uVar211;
                              auVar1328._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1328);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x10);
                              auVar1329._4_4_ = uVar211;
                              auVar1329._0_4_ = uVar211;
                              auVar1329._8_4_ = uVar211;
                              auVar1329._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1329,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1249);
                              uVar211 = *(undefined4 *)(lVar234 + 0xc + lVar201);
                              auVar1250._4_4_ = uVar211;
                              auVar1250._0_4_ = uVar211;
                              auVar1250._8_4_ = uVar211;
                              auVar1250._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1250);
                              uVar211 = *(undefined4 *)(lVar234 + 0x10 + lVar201);
                              auVar1251._4_4_ = uVar211;
                              auVar1251._0_4_ = uVar211;
                              auVar1251._8_4_ = uVar211;
                              auVar1251._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1251,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[1] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x14);
                              auVar1089._4_4_ = uVar211;
                              auVar1089._0_4_ = uVar211;
                              auVar1089._8_4_ = uVar211;
                              auVar1089._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1146,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[2] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1089);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x18);
                              auVar1090._4_4_ = uVar211;
                              auVar1090._0_4_ = uVar211;
                              auVar1090._8_4_ = uVar211;
                              auVar1090._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1090,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1329);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x14);
                              auVar1330._4_4_ = uVar211;
                              auVar1330._0_4_ = uVar211;
                              auVar1330._8_4_ = uVar211;
                              auVar1330._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1330);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x18);
                              auVar1331._4_4_ = uVar211;
                              auVar1331._0_4_ = uVar211;
                              auVar1331._8_4_ = uVar211;
                              auVar1331._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1331,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1251);
                              uVar211 = *(undefined4 *)(lVar234 + 0x14 + lVar201);
                              auVar1252._4_4_ = uVar211;
                              auVar1252._0_4_ = uVar211;
                              auVar1252._8_4_ = uVar211;
                              auVar1252._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1252);
                              uVar211 = *(undefined4 *)(lVar234 + 0x18 + lVar201);
                              auVar1253._4_4_ = uVar211;
                              auVar1253._0_4_ = uVar211;
                              auVar1253._8_4_ = uVar211;
                              auVar1253._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1253,auVar1259);
                              *(undefined1 (*) [16])(pauVar260[2] + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x1c);
                              auVar1147._4_4_ = uVar211;
                              auVar1147._0_4_ = uVar211;
                              auVar1147._8_4_ = uVar211;
                              auVar1147._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1090,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[3] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1147);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x20);
                              auVar1148._4_4_ = uVar211;
                              auVar1148._0_4_ = uVar211;
                              auVar1148._8_4_ = uVar211;
                              auVar1148._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar945,auVar1148);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1331);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x1c);
                              auVar1149._4_4_ = uVar211;
                              auVar1149._0_4_ = uVar211;
                              auVar1149._8_4_ = uVar211;
                              auVar1149._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1149);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x20);
                              auVar1150._4_4_ = uVar211;
                              auVar1150._0_4_ = uVar211;
                              auVar1150._8_4_ = uVar211;
                              auVar1150._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar668,auVar1150);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1253);
                              uVar211 = *(undefined4 *)(lVar234 + 0x1c + lVar201);
                              auVar1151._4_4_ = uVar211;
                              auVar1151._0_4_ = uVar211;
                              auVar1151._8_4_ = uVar211;
                              auVar1151._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1151);
                              uVar211 = *(undefined4 *)(lVar234 + 0x20 + lVar201);
                              auVar1152._4_4_ = uVar211;
                              auVar1152._0_4_ = uVar211;
                              auVar1152._8_4_ = uVar211;
                              auVar1152._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1259,auVar1152);
                              *(undefined1 (*) [16])(pauVar260[3] + lVar201 * 2) = auVar1135;
                              pauVar240 = pauVar240 + 4;
                              lVar201 = lVar201 + 0x20;
                              piVar227 = piVar227 + 8;
                              piVar223 = piVar223 + 8;
                              lVar256 = lVar256 + 0x20;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201);
                              auVar1153._4_4_ = uVar211;
                              auVar1153._0_4_ = uVar211;
                              auVar1153._8_4_ = uVar211;
                              auVar1153._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 4);
                              auVar1254._4_4_ = uVar211;
                              auVar1254._0_4_ = uVar211;
                              auVar1254._8_4_ = uVar211;
                              auVar1254._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 8);
                              auVar1091._4_4_ = uVar211;
                              auVar1091._0_4_ = uVar211;
                              auVar1091._8_4_ = uVar211;
                              auVar1091._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201);
                              auVar1332._4_4_ = uVar211;
                              auVar1332._0_4_ = uVar211;
                              auVar1332._8_4_ = uVar211;
                              auVar1332._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1153,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (*pauVar260 + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1254);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 4);
                              auVar1255._4_4_ = uVar211;
                              auVar1255._0_4_ = uVar211;
                              auVar1255._8_4_ = uVar211;
                              auVar1255._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1091,auVar945);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1332);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 8);
                              auVar1333._4_4_ = uVar211;
                              auVar1333._0_4_ = uVar211;
                              auVar1333._8_4_ = uVar211;
                              auVar1333._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1255);
                              uVar211 = *(undefined4 *)(lVar234 + lVar201);
                              auVar1256._4_4_ = uVar211;
                              auVar1256._0_4_ = uVar211;
                              auVar1256._8_4_ = uVar211;
                              auVar1256._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1333,auVar668);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1256);
                              uVar211 = *(undefined4 *)(lVar234 + 4 + lVar201);
                              auVar1257._4_4_ = uVar211;
                              auVar1257._0_4_ = uVar211;
                              auVar1257._8_4_ = uVar211;
                              auVar1257._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1257);
                              uVar211 = *(undefined4 *)(lVar234 + 8 + lVar201);
                              auVar1258._4_4_ = uVar211;
                              auVar1258._0_4_ = uVar211;
                              auVar1258._8_4_ = uVar211;
                              auVar1258._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1258,auVar1259);
                              *(undefined1 (*) [16])(*pauVar260 + lVar201 * 2) = auVar1135;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0xc);
                              auVar1154._4_4_ = uVar211;
                              auVar1154._0_4_ = uVar211;
                              auVar1154._8_4_ = uVar211;
                              auVar1154._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1091,auVar268,
                                                          *(undefined1 (*) [16])
                                                           (pauVar260[1] + lVar201 * 2));
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1154);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar201 + 0x10);
                              auVar1155._4_4_ = uVar211;
                              auVar1155._0_4_ = uVar211;
                              auVar1155._8_4_ = uVar211;
                              auVar1155._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar945,auVar1155);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1333);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0xc);
                              auVar1156._4_4_ = uVar211;
                              auVar1156._0_4_ = uVar211;
                              auVar1156._8_4_ = uVar211;
                              auVar1156._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1156);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar201 + 0x10);
                              auVar1157._4_4_ = uVar211;
                              auVar1157._0_4_ = uVar211;
                              auVar1157._8_4_ = uVar211;
                              auVar1157._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar668,auVar1157);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1258);
                              uVar211 = *(undefined4 *)(lVar234 + 0xc + lVar201);
                              auVar1158._4_4_ = uVar211;
                              auVar1158._0_4_ = uVar211;
                              auVar1158._8_4_ = uVar211;
                              auVar1158._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1158);
                              uVar211 = *(undefined4 *)(lVar234 + 0x10 + lVar201);
                              auVar1159._4_4_ = uVar211;
                              auVar1159._0_4_ = uVar211;
                              auVar1159._8_4_ = uVar211;
                              auVar1159._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1259,auVar1159);
                              *(undefined1 (*) [16])(pauVar260[1] + lVar201 * 2) = auVar1135;
                              pauVar240 = pauVar240 + 2;
                              lVar201 = lVar201 + 0x10;
                              piVar227 = piVar227 + 4;
                              piVar223 = piVar223 + 4;
                              lVar256 = lVar256 + 0x10;
                            }
                            puVar261 = (undefined4 *)((long)piVar222 + lVar201);
                            puVar254 = (undefined4 *)((long)piVar255 + lVar201);
                            puVar252 = (undefined4 *)(lVar234 + lVar201);
                            pauVar260 = pauVar240;
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *puVar261;
                              auVar1092._4_4_ = uVar211;
                              auVar1092._0_4_ = uVar211;
                              auVar1092._8_4_ = uVar211;
                              auVar1092._12_4_ = uVar211;
                              uVar211 = puVar261[1];
                              auVar1160._4_4_ = uVar211;
                              auVar1160._0_4_ = uVar211;
                              auVar1160._8_4_ = uVar211;
                              auVar1160._12_4_ = uVar211;
                              auVar1135 = vfmadd213ps_fma(auVar1092,auVar268,*pauVar260);
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar310,auVar1160);
                              uVar211 = puVar261[2];
                              auVar1161._4_4_ = uVar211;
                              auVar1161._0_4_ = uVar211;
                              auVar1161._8_4_ = uVar211;
                              auVar1161._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar945,auVar1161);
                              uVar211 = *puVar254;
                              auVar1162._4_4_ = uVar211;
                              auVar1162._0_4_ = uVar211;
                              auVar1162._8_4_ = uVar211;
                              auVar1162._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar309,auVar1162);
                              uVar211 = puVar254[1];
                              auVar1163._4_4_ = uVar211;
                              auVar1163._0_4_ = uVar211;
                              auVar1163._8_4_ = uVar211;
                              auVar1163._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar534,auVar1163);
                              uVar211 = puVar254[2];
                              auVar1164._4_4_ = uVar211;
                              auVar1164._0_4_ = uVar211;
                              auVar1164._8_4_ = uVar211;
                              auVar1164._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar668,auVar1164);
                              uVar211 = *puVar252;
                              auVar1165._4_4_ = uVar211;
                              auVar1165._0_4_ = uVar211;
                              auVar1165._8_4_ = uVar211;
                              auVar1165._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar413,auVar1165);
                              uVar211 = puVar252[1];
                              auVar1166._4_4_ = uVar211;
                              auVar1166._0_4_ = uVar211;
                              auVar1166._8_4_ = uVar211;
                              auVar1166._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1168,auVar1166);
                              uVar211 = puVar252[2];
                              auVar1167._4_4_ = uVar211;
                              auVar1167._0_4_ = uVar211;
                              auVar1167._8_4_ = uVar211;
                              auVar1167._12_4_ = uVar211;
                              auVar1135 = vfmadd231ps_fma(auVar1135,auVar1259,auVar1167);
                              *pauVar260 = auVar1135;
                              puVar261 = puVar261 + 2;
                              puVar254 = puVar254 + 2;
                              puVar252 = puVar252 + 2;
                              pauVar260 = pauVar260 + 1;
                              piVar227 = piVar227 + 2;
                              piVar223 = piVar223 + 2;
                              lVar256 = lVar256 + 8;
                            }
                            piVar255 = piVar223;
                            lVar234 = lVar256;
                            piVar222 = piVar227;
                          }
                          pauVar226 = pauVar226 + 9;
                        }
                      }
                    }
                    else {
                      iVar187 = top_blob->w;
                      iVar257 = top_blob->c;
                      pvVar204 = (this->super_Convolution).bias_data.data;
                      iVar188 = top_blob->h;
                      if (top_blob->h < 1) {
                        iVar188 = 0;
                      }
                      uVar210 = (ulong)(uint)local_920.c;
                      if (local_920.c < 1) {
                        uVar210 = 0;
                      }
                      uVar209 = (ulong)(uint)(iVar257 >> 1);
                      if (iVar257 >> 1 < 1) {
                        uVar209 = 0;
                      }
                      for (uVar229 = 0; uVar229 != uVar209; uVar229 = uVar229 + 1) {
                        uVar237 = (long)top_blob->h * (long)top_blob->w;
                        uVar196 = top_blob->elemsize;
                        uVar242 = (uVar196 * uVar237 + 0xf & 0xfffffffffffffff0) / uVar196;
                        if (top_blob->dims == 4) {
                          uVar242 = uVar237;
                        }
                        lVar200 = uVar229 * 2 + 1;
                        if (pvVar204 == (void *)0x0) {
                          auVar268 = ZEXT816(0) << 0x40;
                          uVar266 = 0;
                          uVar306 = 0;
                        }
                        else {
                          auVar268 = *(undefined1 (*) [16])((long)pvVar204 + uVar229 * 0x20);
                          puVar224 = (undefined8 *)((long)pvVar204 + lVar200 * 0x10);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                        }
                        lVar208 = uVar196 * top_blob->cstep;
                        pauVar238 = (undefined1 (*) [16])
                                    (lVar208 * uVar229 * 2 + (long)top_blob->data);
                        puVar224 = (undefined8 *)(lVar208 * lVar200 + (long)top_blob->data);
                        iVar258 = (int)uVar242 * top_blob->d;
                        pauVar226 = pauVar238;
                        iVar239 = iVar258;
                        if (iVar258 < 1) {
                          iVar258 = 0;
                          iVar239 = iVar258;
                        }
                        while (bVar186 = iVar258 != 0, iVar258 = iVar258 + -1, puVar214 = puVar224,
                              bVar186) {
                          *pauVar226 = auVar268;
                          pauVar226 = pauVar226 + 1;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *puVar214 = uVar266;
                          puVar214[1] = uVar306;
                          puVar214 = puVar214 + 2;
                        }
                        pvVar251 = (this->weight_data_tm).data;
                        lVar208 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
                        pauVar260 = (undefined1 (*) [16])(uVar229 * 2 * lVar208 + (long)pvVar251);
                        pauVar226 = (undefined1 (*) [16])(lVar208 * lVar200 + (long)pvVar251);
                        for (uVar196 = 0; uVar196 != uVar210; uVar196 = uVar196 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar196 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar200 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          uStack_a78 = *(undefined8 *)(*pauVar260 + 8);
                          auVar1239 = *pauVar260;
                          auVar1140 = *pauVar260;
                          auVar1136 = *pauVar260;
                          auVar1081 = *pauVar260;
                          auVar1168 = *pauVar260;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar260;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar260 >> 0x20);
                          pauVar240 = pauVar260 + 1;
                          uStack_a18 = *(undefined8 *)(pauVar260[1] + 8);
                          auVar1240 = *pauVar240;
                          auVar1141 = *pauVar240;
                          auVar1137 = *pauVar240;
                          auVar1082 = *pauVar240;
                          auVar1259 = *pauVar240;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar240;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          auVar310 = pauVar260[2];
                          local_a00._0_16_ = auVar310;
                          pauVar240 = pauVar260 + 3;
                          auVar162 = *(undefined1 (*) [12])*pauVar240;
                          auVar159 = *(undefined1 (*) [12])*pauVar240;
                          auVar156 = *(undefined1 (*) [12])*pauVar240;
                          auVar153 = *(undefined1 (*) [12])*pauVar240;
                          auVar149 = *(undefined1 (*) [12])*pauVar240;
                          auVar146 = *(undefined1 (*) [12])*pauVar240;
                          uStack_b34 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar260[3] + 8) >> 0x20);
                          pauVar240 = pauVar260 + 4;
                          uStack_838 = *(undefined8 *)(pauVar260[4] + 8);
                          auVar35 = *pauVar240;
                          auVar1233 = *pauVar240;
                          auVar1086 = *pauVar240;
                          auVar1076 = *pauVar240;
                          local_840._0_4_ = (uint)*(undefined8 *)*pauVar240;
                          local_840._4_4_ = (undefined4)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          pauVar240 = pauVar260 + 5;
                          auVar163 = *(undefined1 (*) [12])*pauVar240;
                          auVar160 = *(undefined1 (*) [12])*pauVar240;
                          auVar157 = *(undefined1 (*) [12])*pauVar240;
                          auVar154 = *(undefined1 (*) [12])*pauVar240;
                          auVar150 = *(undefined1 (*) [12])*pauVar240;
                          auVar147 = *(undefined1 (*) [12])*pauVar240;
                          uStack_ad4 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar260[5] + 8) >> 0x20);
                          pauVar240 = pauVar260 + 6;
                          auVar164 = *(undefined1 (*) [12])*pauVar240;
                          auVar161 = *(undefined1 (*) [12])*pauVar240;
                          auVar158 = *(undefined1 (*) [12])*pauVar240;
                          auVar155 = *(undefined1 (*) [12])*pauVar240;
                          auVar152 = *(undefined1 (*) [12])*pauVar240;
                          auVar151 = *(undefined1 (*) [12])*pauVar240;
                          auVar148 = *(undefined1 (*) [12])*pauVar240;
                          uStack_b74 = (undefined4)
                                       ((ulong)*(undefined8 *)(pauVar260[6] + 8) >> 0x20);
                          auVar945 = pauVar260[7];
                          local_7c0._0_16_ = auVar945;
                          pauVar240 = pauVar260 + 8;
                          auVar76 = *pauVar240;
                          auVar1238 = *pauVar240;
                          auVar1235 = *pauVar240;
                          auVar1087 = *pauVar240;
                          auVar1080 = *pauVar240;
                          auVar1078 = *pauVar240;
                          uStack_758 = *(undefined8 *)(*pauVar226 + 8);
                          auVar1241 = *pauVar226;
                          auVar1142 = *pauVar226;
                          auVar1083 = *pauVar226;
                          auVar1135 = *pauVar226;
                          local_760 = (int)*(undefined8 *)*pauVar226;
                          iStack_75c = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          auVar309 = pauVar226[1];
                          _local_9c0 = auVar309;
                          pauVar240 = pauVar226 + 2;
                          uStack_a38 = *(undefined8 *)(pauVar226[2] + 8);
                          auVar33 = *pauVar240;
                          auVar1236 = *pauVar240;
                          auVar1143 = *pauVar240;
                          auVar1138 = *pauVar240;
                          auVar1084 = *pauVar240;
                          auVar1074 = *pauVar240;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar240;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          pauVar240 = pauVar226 + 3;
                          uStack_a58 = *(undefined8 *)(pauVar226[3] + 8);
                          auVar34 = *pauVar240;
                          auVar1237 = *pauVar240;
                          auVar1232 = *pauVar240;
                          auVar1139 = *pauVar240;
                          auVar1085 = *pauVar240;
                          auVar1075 = *pauVar240;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar240;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          pauVar240 = pauVar226 + 4;
                          uStack_778 = *(undefined8 *)(pauVar226[4] + 8);
                          auVar75 = *pauVar240;
                          auVar1234 = *pauVar240;
                          auVar1079 = *pauVar240;
                          auVar1077 = *pauVar240;
                          local_780._0_4_ = (int)*(undefined8 *)*pauVar240;
                          local_780._4_4_ = (int)((ulong)*(undefined8 *)*pauVar240 >> 0x20);
                          auVar534 = pauVar226[5];
                          local_880._0_16_ = auVar534;
                          auVar668 = pauVar226[6];
                          local_9a0._0_16_ = auVar668;
                          auVar413 = pauVar226[7];
                          local_960._0_16_ = auVar413;
                          auVar268 = pauVar226[8];
                          local_980._0_16_ = auVar268;
                          pauVar240 = pauVar238;
                          puVar214 = puVar224;
                          for (iVar239 = 0; iVar239 != iVar188; iVar239 = iVar239 + 1) {
                            lVar208 = 0;
                            pauVar225 = pauVar240;
                            puVar231 = puVar214;
                            for (iVar258 = 0; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar514._4_4_ = uVar211;
                              auVar514._0_4_ = uVar211;
                              auVar514._8_4_ = uVar211;
                              auVar514._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar751._4_4_ = uVar211;
                              auVar751._0_4_ = uVar211;
                              auVar751._8_4_ = uVar211;
                              auVar751._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar405._4_4_ = uVar211;
                              auVar405._0_4_ = uVar211;
                              auVar405._8_4_ = uVar211;
                              auVar405._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar935._4_4_ = uVar211;
                              auVar935._0_4_ = uVar211;
                              auVar935._8_4_ = uVar211;
                              auVar935._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar872._4_4_ = uVar211;
                              auVar872._0_4_ = uVar211;
                              auVar872._8_4_ = uVar211;
                              auVar872._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar618._4_4_ = uVar211;
                              auVar618._0_4_ = uVar211;
                              auVar618._8_4_ = uVar211;
                              auVar618._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar1005._4_4_ = uVar211;
                              auVar1005._0_4_ = uVar211;
                              auVar1005._8_4_ = uVar211;
                              auVar1005._12_4_ = uVar211;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (*pauVar240 + lVar208 * 4),auVar514,
                                                        auVar1168);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar751,auVar1259);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar405,auVar310);
                              auVar69._12_4_ = uStack_b34;
                              auVar69._0_12_ = auVar146;
                              auVar19 = vfmadd231ps_fma(auVar18,auVar935,auVar69);
                              auVar18 = vfmadd213ps_fma(auVar514,auVar1135,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar751,auVar309);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar405,auVar1074);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1075,auVar935);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar936._4_4_ = uVar211;
                              auVar936._0_4_ = uVar211;
                              auVar936._8_4_ = uVar211;
                              auVar936._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar872,auVar1076);
                              auVar108._12_4_ = uStack_ad4;
                              auVar108._0_12_ = auVar147;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar618,auVar108);
                              auVar26._12_4_ = uStack_b74;
                              auVar26._0_12_ = auVar148;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1005,auVar26);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar872,auVar1077);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar618,auVar534);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1005,auVar668);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar1006._4_4_ = uVar211;
                              auVar1006._0_4_ = uVar211;
                              auVar1006._8_4_ = uVar211;
                              auVar1006._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar936,auVar945);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1006,auVar1078);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar936,auVar413);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1006,auVar268);
                              *(undefined1 (*) [16])(*pauVar240 + lVar208 * 4) = auVar19;
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4) = auVar18;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar515._4_4_ = uVar211;
                              auVar515._0_4_ = uVar211;
                              auVar515._8_4_ = uVar211;
                              auVar515._12_4_ = uVar211;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (pauVar240[1] + lVar208 * 4),auVar751,
                                                        auVar1168);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar405,auVar1259);
                              auVar19 = vfmadd231ps_fma(auVar18,auVar515,auVar310);
                              auVar18 = vfmadd213ps_fma(auVar751,auVar1135,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4 + 0x10));
                              auVar70._12_4_ = uStack_b34;
                              auVar70._0_12_ = auVar149;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar872,auVar70);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar405,auVar309);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar515,auVar1074);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1075,auVar872);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar873._4_4_ = uVar211;
                              auVar873._0_4_ = uVar211;
                              auVar873._8_4_ = uVar211;
                              auVar873._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar618,auVar1076);
                              auVar109._12_4_ = uStack_ad4;
                              auVar109._0_12_ = auVar150;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar873,auVar109);
                              auVar27._12_4_ = uStack_b74;
                              auVar27._0_12_ = auVar151;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar936,auVar27);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar618,auVar1079);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar873,auVar534);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar668,auVar936);
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar937._4_4_ = uVar211;
                              auVar937._0_4_ = uVar211;
                              auVar937._8_4_ = uVar211;
                              auVar937._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1006,auVar945);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar937,auVar1080);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1006,auVar413);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar937,auVar268);
                              *(undefined1 (*) [16])(pauVar240[1] + lVar208 * 4) = auVar19;
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4 + 0x10) = auVar18;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                              auVar752._4_4_ = uVar211;
                              auVar752._0_4_ = uVar211;
                              auVar752._8_4_ = uVar211;
                              auVar752._12_4_ = uVar211;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (pauVar240[2] + lVar208 * 4),auVar405,
                                                        auVar1081);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar515,auVar1082);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar752,auVar310);
                              auVar19 = vfmadd231ps_fma(auVar18,auVar618,auVar70);
                              auVar18 = vfmadd213ps_fma(auVar405,auVar1083,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4 + 0x20));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar515,auVar309);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar752,auVar1084);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar618,auVar1085);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                              auVar619._4_4_ = uVar211;
                              auVar619._0_4_ = uVar211;
                              auVar619._8_4_ = uVar211;
                              auVar619._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar873,auVar1086);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar619,auVar109);
                              auVar28._12_4_ = uStack_b74;
                              auVar28._0_12_ = auVar152;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1006,auVar28);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar873,auVar1079);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar619,auVar534);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar668,auVar1006);
                              uVar211 = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                              auVar1007._4_4_ = uVar211;
                              auVar1007._0_4_ = uVar211;
                              auVar1007._8_4_ = uVar211;
                              auVar1007._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar937,auVar945);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1007,auVar1087);
                              *(undefined1 (*) [16])(pauVar240[2] + lVar208 * 4) = auVar19;
                              auVar18 = vfmadd231ps_fma(auVar18,auVar937,auVar413);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1007,auVar268);
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4 + 0x20) = auVar18;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (pauVar240[3] + lVar208 * 4),auVar515,
                                                        auVar1136);
                              auVar19 = vfmadd231ps_fma(auVar18,auVar752,auVar1137);
                              auVar18 = vfmadd213ps_fma(auVar515,auVar1083,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4 + 0x30));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar752,auVar309);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                              auVar753._4_4_ = uVar211;
                              auVar753._0_4_ = uVar211;
                              auVar753._8_4_ = uVar211;
                              auVar753._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar753,auVar310);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar753,auVar1138);
                              auVar71._12_4_ = uStack_b34;
                              auVar71._0_12_ = auVar153;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar873,auVar71);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar873,auVar1139);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar619,auVar1086);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1079,auVar619);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                              auVar620._4_4_ = uVar211;
                              auVar620._0_4_ = uVar211;
                              auVar620._8_4_ = uVar211;
                              auVar620._12_4_ = uVar211;
                              auVar110._12_4_ = uStack_ad4;
                              auVar110._0_12_ = auVar154;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar620,auVar110);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar534,auVar620);
                              auVar29._12_4_ = uStack_b74;
                              auVar29._0_12_ = auVar155;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar937,auVar29);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar668,auVar937);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar1007,auVar945);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar413,auVar1007);
                              uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                              auVar621._4_4_ = uVar211;
                              auVar621._0_4_ = uVar211;
                              auVar621._8_4_ = uVar211;
                              auVar621._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar621,auVar1087);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar268,auVar621);
                              *(undefined1 (*) [16])(pauVar240[3] + lVar208 * 4) = auVar19;
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4 + 0x30) = auVar18;
                              pauVar225 = pauVar225 + 4;
                              puVar231 = puVar231 + 8;
                              lVar208 = lVar208 + 0x10;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar1008._4_4_ = uVar211;
                              auVar1008._0_4_ = uVar211;
                              auVar1008._8_4_ = uVar211;
                              auVar1008._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar406._4_4_ = uVar211;
                              auVar406._0_4_ = uVar211;
                              auVar406._8_4_ = uVar211;
                              auVar406._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar754._4_4_ = uVar211;
                              auVar754._0_4_ = uVar211;
                              auVar754._8_4_ = uVar211;
                              auVar754._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar874._4_4_ = uVar211;
                              auVar874._0_4_ = uVar211;
                              auVar874._8_4_ = uVar211;
                              auVar874._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar622._4_4_ = uVar211;
                              auVar622._0_4_ = uVar211;
                              auVar622._8_4_ = uVar211;
                              auVar622._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar516._4_4_ = uVar211;
                              auVar516._0_4_ = uVar211;
                              auVar516._8_4_ = uVar211;
                              auVar516._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar938._4_4_ = uVar211;
                              auVar938._0_4_ = uVar211;
                              auVar938._8_4_ = uVar211;
                              auVar938._12_4_ = uVar211;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (*pauVar240 + lVar208 * 4),auVar1008,
                                                        auVar1140);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar406,auVar1141);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar754,auVar310);
                              auVar72._12_4_ = uStack_b34;
                              auVar72._0_12_ = auVar156;
                              auVar19 = vfmadd231ps_fma(auVar18,auVar874,auVar72);
                              auVar18 = vfmadd213ps_fma(auVar1008,auVar1142,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar406,auVar309);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar754,auVar1143);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar874,auVar1232);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar875._4_4_ = uVar211;
                              auVar875._0_4_ = uVar211;
                              auVar875._8_4_ = uVar211;
                              auVar875._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar622,auVar1233);
                              auVar111._12_4_ = uStack_ad4;
                              auVar111._0_12_ = auVar157;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar516,auVar111);
                              auVar30._12_4_ = uStack_b74;
                              auVar30._0_12_ = auVar158;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar938,auVar30);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar622,auVar1234);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar516,auVar534);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar938,auVar668);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar939._4_4_ = uVar211;
                              auVar939._0_4_ = uVar211;
                              auVar939._8_4_ = uVar211;
                              auVar939._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar875,auVar945);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar939,auVar1235);
                              *(undefined1 (*) [16])(*pauVar240 + lVar208 * 4) = auVar19;
                              auVar18 = vfmadd231ps_fma(auVar18,auVar875,auVar413);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar939,auVar268);
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4) = auVar18;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (pauVar240[1] + lVar208 * 4),auVar406,
                                                        auVar1140);
                              auVar19 = vfmadd231ps_fma(auVar18,auVar754,auVar1141);
                              auVar18 = vfmadd213ps_fma(auVar406,auVar1142,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4 + 0x10));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar309,auVar754);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar755._4_4_ = uVar211;
                              auVar755._0_4_ = uVar211;
                              auVar755._8_4_ = uVar211;
                              auVar755._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar755,auVar310);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar755,auVar1236);
                              auVar73._12_4_ = uStack_b34;
                              auVar73._0_12_ = auVar159;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar622,auVar73);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar622,auVar1237);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar516,auVar1233);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar1234,auVar516);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar517._4_4_ = uVar211;
                              auVar517._0_4_ = uVar211;
                              auVar517._8_4_ = uVar211;
                              auVar517._12_4_ = uVar211;
                              auVar112._12_4_ = uStack_ad4;
                              auVar112._0_12_ = auVar160;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar517,auVar112);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar517,auVar534);
                              auVar31._12_4_ = uStack_b74;
                              auVar31._0_12_ = auVar161;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar875,auVar31);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar875,auVar668);
                              auVar19 = vfmadd231ps_fma(auVar19,auVar939,auVar945);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar413,auVar939);
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar518._4_4_ = uVar211;
                              auVar518._0_4_ = uVar211;
                              auVar518._8_4_ = uVar211;
                              auVar518._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar518,auVar1238);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar268,auVar518);
                              *(undefined1 (*) [16])(pauVar240[1] + lVar208 * 4) = auVar19;
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4 + 0x10) = auVar18;
                              pauVar225 = pauVar225 + 2;
                              puVar231 = puVar231 + 4;
                              lVar208 = lVar208 + 8;
                            }
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar407._4_4_ = uVar211;
                              auVar407._0_4_ = uVar211;
                              auVar407._8_4_ = uVar211;
                              auVar407._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar623._4_4_ = uVar211;
                              auVar623._0_4_ = uVar211;
                              auVar623._8_4_ = uVar211;
                              auVar623._12_4_ = uVar211;
                              auVar18 = vfmadd231ps_fma(*(undefined1 (*) [16])
                                                         (*pauVar240 + lVar208 * 4),auVar407,
                                                        auVar1239);
                              auVar19 = vfmadd231ps_fma(auVar18,auVar623,auVar1240);
                              auVar18 = vfmadd213ps_fma(auVar407,auVar1241,
                                                        *(undefined1 (*) [16])
                                                         ((long)puVar214 + lVar208 * 4));
                              auVar18 = vfmadd231ps_fma(auVar18,auVar623,auVar309);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar624._4_4_ = uVar211;
                              auVar624._0_4_ = uVar211;
                              auVar624._8_4_ = uVar211;
                              auVar624._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar624,auVar310);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar624,auVar33);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar625._4_4_ = uVar211;
                              auVar625._0_4_ = uVar211;
                              auVar625._8_4_ = uVar211;
                              auVar625._12_4_ = uVar211;
                              auVar74._12_4_ = uStack_b34;
                              auVar74._0_12_ = auVar162;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar625,auVar74);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar625,auVar34);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar626._4_4_ = uVar211;
                              auVar626._0_4_ = uVar211;
                              auVar626._8_4_ = uVar211;
                              auVar626._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar626,auVar35);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar626,auVar75);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar627._4_4_ = uVar211;
                              auVar627._0_4_ = uVar211;
                              auVar627._8_4_ = uVar211;
                              auVar627._12_4_ = uVar211;
                              auVar113._12_4_ = uStack_ad4;
                              auVar113._0_12_ = auVar163;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar627,auVar113);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar627,auVar534);
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar628._4_4_ = uVar211;
                              auVar628._0_4_ = uVar211;
                              auVar628._8_4_ = uVar211;
                              auVar628._12_4_ = uVar211;
                              auVar32._12_4_ = uStack_b74;
                              auVar32._0_12_ = auVar164;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar628,auVar32);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar628,auVar668);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar629._4_4_ = uVar211;
                              auVar629._0_4_ = uVar211;
                              auVar629._8_4_ = uVar211;
                              auVar629._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar629,auVar945);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar629,auVar413);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar630._4_4_ = uVar211;
                              auVar630._0_4_ = uVar211;
                              auVar630._8_4_ = uVar211;
                              auVar630._12_4_ = uVar211;
                              auVar19 = vfmadd231ps_fma(auVar19,auVar630,auVar76);
                              auVar18 = vfmadd231ps_fma(auVar18,auVar630,auVar268);
                              *(undefined1 (*) [16])(*pauVar240 + lVar208 * 4) = auVar19;
                              *(undefined1 (*) [16])((long)puVar214 + lVar208 * 4) = auVar18;
                              pauVar225 = pauVar225 + 1;
                              puVar231 = puVar231 + 2;
                              lVar208 = lVar208 + 4;
                            }
                            piVar222 = (int *)((long)piVar222 + lVar208 + 8);
                            piVar255 = (int *)((long)piVar255 + lVar208 + 8);
                            lVar200 = lVar200 + lVar208 + 8;
                            pauVar240 = pauVar225;
                            puVar214 = puVar231;
                          }
                          pauVar260 = pauVar260 + 9;
                          pauVar226 = pauVar226 + 9;
                        }
                      }
                      for (uVar209 = (long)iVar257 & 0xfffffffffffffffe;
                          (long)uVar209 < (long)iVar257; uVar209 = uVar209 + 1) {
                        local_840._0_4_ = (uint)uVar209;
                        local_840._4_4_ = (undefined4)(uVar209 >> 0x20);
                        uVar242 = (long)top_blob->h * (long)top_blob->w;
                        uVar229 = top_blob->elemsize;
                        uVar196 = (uVar229 * uVar242 + 0xf & 0xfffffffffffffff0) / uVar229;
                        if (top_blob->dims == 4) {
                          uVar196 = uVar242;
                        }
                        if (pvVar204 == (void *)0x0) {
                          uVar266 = 0;
                          uVar306 = 0;
                        }
                        else {
                          puVar224 = (undefined8 *)((long)pvVar204 + uVar209 * 0x10);
                          uVar266 = *puVar224;
                          uVar306 = puVar224[1];
                        }
                        puVar214 = (undefined8 *)
                                   (top_blob->cstep * uVar209 * uVar229 + (long)top_blob->data);
                        iVar239 = (int)uVar196 * top_blob->d;
                        puVar224 = puVar214;
                        if (iVar239 < 1) {
                          iVar239 = 0;
                        }
                        while (bVar186 = iVar239 != 0, iVar239 = iVar239 + -1, bVar186) {
                          *puVar224 = uVar266;
                          puVar224[1] = uVar306;
                          puVar224 = puVar224 + 2;
                        }
                        pauVar199 = (undefined1 (*) [12])
                                    ((this->weight_data_tm).cstep * uVar209 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        for (uVar229 = 0; uVar229 != uVar210; uVar229 = uVar229 + 1) {
                          piVar222 = (int *)(local_920.cstep * uVar229 * local_920.elemsize +
                                            (long)local_920.data);
                          piVar255 = (int *)((long)piVar222 + (long)local_920.w * local_920.elemsize
                                            );
                          lVar200 = (long)piVar222 + (long)local_920.w * local_920.elemsize * 2;
                          auVar157 = *pauVar199;
                          auVar154 = *pauVar199;
                          auVar152 = *pauVar199;
                          auVar149 = *pauVar199;
                          auVar146 = *pauVar199;
                          uStack_b74 = (undefined4)((ulong)*(undefined8 *)(*pauVar199 + 8) >> 0x20);
                          pauVar1 = (undefined1 (*) [12])(pauVar199[1] + 4);
                          auVar158 = *pauVar1;
                          auVar155 = *pauVar1;
                          auVar150 = *pauVar1;
                          auVar147 = *pauVar1;
                          uStack_ad4 = (undefined4)((ulong)*(undefined8 *)pauVar199[2] >> 0x20);
                          pauVar226 = (undefined1 (*) [16])(pauVar199[2] + 8);
                          auVar1079 = *pauVar226;
                          auVar1074 = *pauVar226;
                          auVar1259 = *pauVar226;
                          auVar310 = *pauVar226;
                          pauVar226 = (undefined1 (*) [16])(pauVar199 + 4);
                          uStack_a38 = *(undefined8 *)(pauVar199[4] + 8);
                          auVar1080 = *pauVar226;
                          auVar1075 = *pauVar226;
                          auVar413 = *pauVar226;
                          auVar945 = *pauVar226;
                          local_a40._0_4_ = (float)*(undefined8 *)*pauVar226;
                          local_a40._4_4_ = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          pauVar1 = (undefined1 (*) [12])(pauVar199[5] + 4);
                          auVar159 = *pauVar1;
                          auVar156 = *pauVar1;
                          auVar153 = *pauVar1;
                          auVar151 = *pauVar1;
                          auVar148 = *pauVar1;
                          uStack_b34 = (undefined4)((ulong)*(undefined8 *)pauVar199[6] >> 0x20);
                          pauVar226 = (undefined1 (*) [16])(pauVar199[6] + 8);
                          uStack_a18 = *(undefined8 *)(pauVar199[7] + 4);
                          auVar1081 = *pauVar226;
                          auVar1076 = *pauVar226;
                          auVar309 = *pauVar226;
                          local_a20._0_4_ = (int)*(undefined8 *)*pauVar226;
                          local_a20._4_4_ = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          pauVar226 = (undefined1 (*) [16])(pauVar199 + 8);
                          uStack_a58 = *(undefined8 *)(pauVar199[8] + 8);
                          auVar1082 = *pauVar226;
                          auVar1077 = *pauVar226;
                          auVar1168 = *pauVar226;
                          auVar534 = *pauVar226;
                          local_a60._0_4_ = (float)*(undefined8 *)*pauVar226;
                          local_a60._4_4_ = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          pauVar226 = (undefined1 (*) [16])(pauVar199[9] + 4);
                          uStack_a78 = *(undefined8 *)pauVar199[10];
                          auVar1083 = *pauVar226;
                          auVar1078 = *pauVar226;
                          auVar1135 = *pauVar226;
                          auVar668 = *pauVar226;
                          local_a80._0_4_ = (float)*(undefined8 *)*pauVar226;
                          local_a80._4_4_ = (int)((ulong)*(undefined8 *)*pauVar226 >> 0x20);
                          auVar268 = *(undefined1 (*) [16])(pauVar199[10] + 8);
                          local_a00._0_16_ = auVar268;
                          puVar224 = puVar214;
                          for (iVar239 = 0; iVar239 != iVar188; iVar239 = iVar239 + 1) {
                            lVar208 = 0;
                            puVar231 = puVar224;
                            for (iVar258 = 0; iVar258 + 3 < iVar187; iVar258 = iVar258 + 4) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar422._4_4_ = uVar211;
                              auVar422._0_4_ = uVar211;
                              auVar422._8_4_ = uVar211;
                              auVar422._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar1493._4_4_ = uVar211;
                              auVar1493._0_4_ = uVar211;
                              auVar1493._8_4_ = uVar211;
                              auVar1493._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar1072._4_4_ = uVar211;
                              auVar1072._0_4_ = uVar211;
                              auVar1072._8_4_ = uVar211;
                              auVar1072._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar1132._4_4_ = uVar211;
                              auVar1132._0_4_ = uVar211;
                              auVar1132._8_4_ = uVar211;
                              auVar1132._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar1399._4_4_ = uVar211;
                              auVar1399._0_4_ = uVar211;
                              auVar1399._8_4_ = uVar211;
                              auVar1399._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar662._4_4_ = uVar211;
                              auVar662._0_4_ = uVar211;
                              auVar662._8_4_ = uVar211;
                              auVar662._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar336._4_4_ = uVar211;
                              auVar336._0_4_ = uVar211;
                              auVar336._8_4_ = uVar211;
                              auVar336._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar799._4_4_ = uVar211;
                              auVar799._0_4_ = uVar211;
                              auVar799._8_4_ = uVar211;
                              auVar799._12_4_ = uVar211;
                              _local_9c0 = auVar799;
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar1464._4_4_ = uVar211;
                              auVar1464._0_4_ = uVar211;
                              auVar1464._8_4_ = uVar211;
                              auVar1464._12_4_ = uVar211;
                              auVar39._12_4_ = uStack_b74;
                              auVar39._0_12_ = auVar146;
                              auVar1084 = vfmadd213ps_fma(auVar422,auVar39,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4));
                              auVar119._12_4_ = uStack_ad4;
                              auVar119._0_12_ = auVar147;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1493,auVar119);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1072,auVar310);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1132,auVar945);
                              auVar80._12_4_ = uStack_b34;
                              auVar80._0_12_ = auVar148;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1399,auVar80);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar662,auVar309);
                              local_980._0_16_ = auVar662;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar336,auVar534);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar799,auVar668);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1464,auVar268);
                              local_960._0_16_ = auVar1464;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar1133._4_4_ = uVar211;
                              auVar1133._0_4_ = uVar211;
                              auVar1133._8_4_ = uVar211;
                              auVar1133._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar1311._4_4_ = uVar211;
                              auVar1311._0_4_ = uVar211;
                              auVar1311._8_4_ = uVar211;
                              auVar1311._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar1465._4_4_ = uVar211;
                              auVar1465._0_4_ = uVar211;
                              auVar1465._8_4_ = uVar211;
                              auVar1465._12_4_ = uVar211;
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4) = auVar1084;
                              auVar40._12_4_ = uStack_b74;
                              auVar40._0_12_ = auVar149;
                              auVar1084 = vfmadd213ps_fma(auVar1493,auVar40,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4 + 0x10));
                              auVar120._12_4_ = uStack_ad4;
                              auVar120._0_12_ = auVar150;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1072,auVar120);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1133,auVar310);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar413,auVar1399);
                              auVar81._12_4_ = uStack_b34;
                              auVar81._0_12_ = auVar151;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar662,auVar81);
                              local_880._0_16_ = auVar1311;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1311,auVar309);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1168,auVar799);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1464,auVar668);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1465,auVar268);
                              local_9a0._0_16_ = auVar1465;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x10);
                              auVar881._4_4_ = uVar211;
                              auVar881._0_4_ = uVar211;
                              auVar881._8_4_ = uVar211;
                              auVar881._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x10);
                              auVar1466._4_4_ = uVar211;
                              auVar1466._0_4_ = uVar211;
                              auVar1466._8_4_ = uVar211;
                              auVar1466._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 0x10 + lVar208);
                              auVar955._4_4_ = uVar211;
                              auVar955._0_4_ = uVar211;
                              auVar955._8_4_ = uVar211;
                              auVar955._12_4_ = uVar211;
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4 + 0x10) =
                                   auVar1084;
                              auVar1084 = vfmadd213ps_fma(auVar1072,auVar40,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4 + 0x20));
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1133,auVar120);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar881,auVar1259);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar413,auVar662);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1311,auVar81);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1466,auVar309);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1168,auVar1464);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1465,auVar1135);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar955,auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0x14);
                              auVar1312._4_4_ = uVar211;
                              auVar1312._0_4_ = uVar211;
                              auVar1312._8_4_ = uVar211;
                              auVar1312._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0x14);
                              auVar1400._4_4_ = uVar211;
                              auVar1400._0_4_ = uVar211;
                              auVar1400._8_4_ = uVar211;
                              auVar1400._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 0x14 + lVar208);
                              auVar1494._4_4_ = uVar211;
                              auVar1494._0_4_ = uVar211;
                              auVar1494._8_4_ = uVar211;
                              auVar1494._12_4_ = uVar211;
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4 + 0x20) =
                                   auVar1084;
                              auVar41._12_4_ = uStack_b74;
                              auVar41._0_12_ = auVar152;
                              auVar1084 = vfmadd213ps_fma(auVar1133,auVar41,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4 + 0x30));
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar120,auVar881);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1259,auVar1312);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar413,auVar1311);
                              auVar82._12_4_ = uStack_b34;
                              auVar82._0_12_ = auVar153;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1466,auVar82);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar309,auVar1400);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1168,auVar1465);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1135,auVar955);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar268,auVar1494);
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4 + 0x30) =
                                   auVar1084;
                              puVar231 = puVar231 + 8;
                              lVar208 = lVar208 + 0x10;
                            }
                            for (; iVar258 + 1 < iVar187; iVar258 = iVar258 + 2) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar337._4_4_ = uVar211;
                              auVar337._0_4_ = uVar211;
                              auVar337._8_4_ = uVar211;
                              auVar337._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar1073._4_4_ = uVar211;
                              auVar1073._0_4_ = uVar211;
                              auVar1073._8_4_ = uVar211;
                              auVar1073._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar1231._4_4_ = uVar211;
                              auVar1231._0_4_ = uVar211;
                              auVar1231._8_4_ = uVar211;
                              auVar1231._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar1401._4_4_ = uVar211;
                              auVar1401._0_4_ = uVar211;
                              auVar1401._8_4_ = uVar211;
                              auVar1401._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar1313._4_4_ = uVar211;
                              auVar1313._0_4_ = uVar211;
                              auVar1313._8_4_ = uVar211;
                              auVar1313._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar279._4_4_ = uVar211;
                              auVar279._0_4_ = uVar211;
                              auVar279._8_4_ = uVar211;
                              auVar279._12_4_ = uVar211;
                              local_960._0_16_ = auVar279;
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar423._4_4_ = uVar211;
                              auVar423._0_4_ = uVar211;
                              auVar423._8_4_ = uVar211;
                              auVar423._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar1134._4_4_ = uVar211;
                              auVar1134._0_4_ = uVar211;
                              auVar1134._8_4_ = uVar211;
                              auVar1134._12_4_ = uVar211;
                              local_880._0_16_ = auVar1134;
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar1467._4_4_ = uVar211;
                              auVar1467._0_4_ = uVar211;
                              auVar1467._8_4_ = uVar211;
                              auVar1467._12_4_ = uVar211;
                              _local_9c0 = auVar1467;
                              auVar42._12_4_ = uStack_b74;
                              auVar42._0_12_ = auVar154;
                              auVar1084 = vfmadd213ps_fma(auVar337,auVar42,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4));
                              auVar121._12_4_ = uStack_ad4;
                              auVar121._0_12_ = auVar155;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1073,auVar121);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1231,auVar1074);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1075,auVar1401);
                              auVar83._12_4_ = uStack_b34;
                              auVar83._0_12_ = auVar156;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1313,auVar83);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar279,auVar1076);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1077,auVar423);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1134,auVar1078);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1467,auVar268);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 0xc);
                              auVar1402._4_4_ = uVar211;
                              auVar1402._0_4_ = uVar211;
                              auVar1402._8_4_ = uVar211;
                              auVar1402._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 0xc);
                              auVar1468._4_4_ = uVar211;
                              auVar1468._0_4_ = uVar211;
                              auVar1468._8_4_ = uVar211;
                              auVar1468._12_4_ = uVar211;
                              uVar211 = *(undefined4 *)(lVar200 + 0xc + lVar208);
                              auVar1495._4_4_ = uVar211;
                              auVar1495._0_4_ = uVar211;
                              auVar1495._8_4_ = uVar211;
                              auVar1495._12_4_ = uVar211;
                              local_9a0._0_16_ = auVar1495;
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4) = auVar1084;
                              auVar1084 = vfmadd213ps_fma(auVar1073,auVar42,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4 + 0x10));
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar121,auVar1231);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1074,auVar1402);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1075,auVar1313);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar83,auVar279);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1076,auVar1468);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1077,auVar1134);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar1078,auVar1467);
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar268,auVar1495);
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4 + 0x10) =
                                   auVar1084;
                              puVar231 = puVar231 + 4;
                              lVar208 = lVar208 + 8;
                            }
                            for (; iVar258 < iVar187; iVar258 = iVar258 + 1) {
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208);
                              auVar280._4_4_ = uVar211;
                              auVar280._0_4_ = uVar211;
                              auVar280._8_4_ = uVar211;
                              auVar280._12_4_ = uVar211;
                              auVar43._12_4_ = uStack_b74;
                              auVar43._0_12_ = auVar157;
                              auVar1084 = vfmadd213ps_fma(auVar280,auVar43,
                                                          *(undefined1 (*) [16])
                                                           ((long)puVar224 + lVar208 * 4));
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 4);
                              auVar338._4_4_ = uVar211;
                              auVar338._0_4_ = uVar211;
                              auVar338._8_4_ = uVar211;
                              auVar338._12_4_ = uVar211;
                              auVar122._12_4_ = uStack_ad4;
                              auVar122._0_12_ = auVar158;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar338,auVar122);
                              uVar211 = *(undefined4 *)((long)piVar222 + lVar208 + 8);
                              auVar339._4_4_ = uVar211;
                              auVar339._0_4_ = uVar211;
                              auVar339._8_4_ = uVar211;
                              auVar339._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar339,auVar1079);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208);
                              auVar340._4_4_ = uVar211;
                              auVar340._0_4_ = uVar211;
                              auVar340._8_4_ = uVar211;
                              auVar340._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar340,auVar1080);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 4);
                              auVar341._4_4_ = uVar211;
                              auVar341._0_4_ = uVar211;
                              auVar341._8_4_ = uVar211;
                              auVar341._12_4_ = uVar211;
                              auVar84._12_4_ = uStack_b34;
                              auVar84._0_12_ = auVar159;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar341,auVar84);
                              uVar211 = *(undefined4 *)((long)piVar255 + lVar208 + 8);
                              auVar342._4_4_ = uVar211;
                              auVar342._0_4_ = uVar211;
                              auVar342._8_4_ = uVar211;
                              auVar342._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar342,auVar1081);
                              uVar211 = *(undefined4 *)(lVar200 + lVar208);
                              auVar343._4_4_ = uVar211;
                              auVar343._0_4_ = uVar211;
                              auVar343._8_4_ = uVar211;
                              auVar343._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar343,auVar1082);
                              uVar211 = *(undefined4 *)(lVar200 + 4 + lVar208);
                              auVar344._4_4_ = uVar211;
                              auVar344._0_4_ = uVar211;
                              auVar344._8_4_ = uVar211;
                              auVar344._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar344,auVar1083);
                              uVar211 = *(undefined4 *)(lVar200 + 8 + lVar208);
                              auVar345._4_4_ = uVar211;
                              auVar345._0_4_ = uVar211;
                              auVar345._8_4_ = uVar211;
                              auVar345._12_4_ = uVar211;
                              auVar1084 = vfmadd231ps_fma(auVar1084,auVar345,auVar268);
                              *(undefined1 (*) [16])((long)puVar224 + lVar208 * 4) = auVar1084;
                              puVar231 = puVar231 + 2;
                              lVar208 = lVar208 + 4;
                            }
                            piVar222 = (int *)((long)piVar222 + lVar208 + 8);
                            piVar255 = (int *)((long)piVar255 + lVar208 + 8);
                            lVar200 = lVar200 + lVar208 + 8;
                            puVar224 = puVar231;
                          }
                          pauVar199 = pauVar199 + 0xc;
                        }
                      }
                    }
                    pLVar233 = this->activation;
                    goto LAB_001c686b;
                  }
LAB_001c3122:
                  local_760 = (this->super_Convolution).activation_type;
                  iStack_75c = 0;
                  local_b80 = (int)local_920.cstep;
                  local_880._0_8_ = (long)local_920.c;
                  uVar244 = top_blob->w;
                  uVar210 = (ulong)uVar244;
                  local_6e0 = (undefined1 (*) [32])(ulong)(uint)top_blob->h;
                  iVar187 = top_blob->elempack;
                  local_790 = (ulong)top_blob->c;
                  sVar13 = top_blob->cstep;
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)local_660,(long)(int)uVar259,
                             (allocator_type *)local_8d0);
                  auVar230 = local_660;
                  local_818 = (ulong)iVar257;
                  iVar257 = 0;
                  uVar209 = local_960._0_8_ & 0xffffffff;
                  if (local_960._0_4_ < 1) {
                    uVar209 = 0;
                  }
                  iVar188 = local_980._0_4_;
                  if (iVar188 < 1) {
                    iVar188 = 0;
                  }
                  local_a20._0_4_ = iVar189;
                  local_a20._4_4_ = iVar189 >> 0x1f;
                  iVar239 = 0;
                  uVar229 = uVar209;
                  iVar258 = 0;
                  for (; iVar257 != iVar188; iVar257 = iVar257 + 1) {
                    iVar190 = iVar239 * iVar189;
                    iVar239 = iVar239 + (iVar192 * (uint)local_840 -
                                        (int)(float)local_a60 * local_960._0_4_);
                    for (lVar200 = (long)iVar258; (int)uVar229 != lVar200; lVar200 = lVar200 + 1) {
                      *(int *)((long)local_660 + lVar200 * 4) = iVar190;
                      iVar239 = iVar239 + (int)(float)local_a60;
                      iVar190 = iVar190 + iVar189 * (int)(float)local_a60;
                    }
                    uVar229 = (ulong)(uint)((int)uVar229 + (int)uVar209);
                    iVar258 = iVar258 + (int)uVar209;
                  }
                  local_b80 = local_b80 * iVar189;
                  local_790 = local_790 * (long)iVar187;
                  iVar187 = (int)sVar13 * iVar187;
                  local_7c0._0_8_ = (this->super_Convolution).bias_data.data;
                  iVar257 = (int)local_790;
                  uVar209 = (long)((ulong)(uint)(iVar257 >> 0x1f) << 0x20 | local_790 & 0xffffffff)
                            / 8;
                  lVar208 = (long)local_b80;
                  iVar188 = local_b80 * 6;
                  iVar239 = local_b80 * 7;
                  lVar200 = (long)iVar187;
                  local_6f0._0_8_ = SEXT48(iVar187 * 2);
                  local_8d8 = (void *)(long)(iVar187 * 3);
                  if ((int)uVar259 < 1) {
                    uVar259 = 0;
                  }
                  uVar196 = (ulong)uVar259;
                  local_a00._0_8_ = uVar196 * 0x20;
                  iVar258 = (int)uVar209;
                  uVar229 = 0;
                  if (0 < iVar258) {
                    uVar229 = uVar209 & 0xffffffff;
                  }
                  local_9a0._0_8_ = uVar196 * 0x80;
                  piVar255 = (int *)(uVar196 * 0x40);
                  auVar1060 = ZEXT1664((undefined1  [16])0x0);
                  auVar1130 = ZEXT3264(CONCAT428(0x3f000000,
                                                 CONCAT424(0x3f000000,
                                                           CONCAT420(0x3f000000,
                                                                     CONCAT416(0x3f000000,
                                                                               CONCAT412(0x3f000000,
                                                                                         CONCAT48(
                                                  0x3f000000,0x3f0000003f000000)))))));
                  auVar376._8_4_ = 0x3f800000;
                  auVar376._0_8_ = 0x3f8000003f800000;
                  auVar376._12_4_ = 0x3f800000;
                  auVar376._16_4_ = 0x3f800000;
                  auVar376._20_4_ = 0x3f800000;
                  auVar376._24_4_ = 0x3f800000;
                  auVar376._28_4_ = 0x3f800000;
                  iVar190 = local_b80 * 2;
                  iVar192 = local_b80 * 3;
                  local_a40._0_4_ = (float)(local_b80 * 4);
                  local_a40._4_4_ = 0;
                  local_a60._0_4_ = (float)(local_b80 * 5);
                  local_a60._4_4_ = 0;
                  local_780._4_4_ = iVar249 >> 0x1f;
                  lVar234 = uVar196 * 4;
                  auVar1449._8_4_ = 0x42b0c0a5;
                  auVar1449._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar1449._12_4_ = 0x42b0c0a5;
                  auVar1449._16_4_ = 0x42b0c0a5;
                  auVar1449._20_4_ = 0x42b0c0a5;
                  auVar1449._24_4_ = 0x42b0c0a5;
                  auVar1449._28_4_ = 0x42b0c0a5;
                  auVar1485._8_4_ = 0xc2b0c0a5;
                  auVar1485._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar1485._12_4_ = 0xc2b0c0a5;
                  auVar1485._16_4_ = 0xc2b0c0a5;
                  auVar1485._20_4_ = 0xc2b0c0a5;
                  auVar1485._24_4_ = 0xc2b0c0a5;
                  auVar1485._28_4_ = 0xc2b0c0a5;
                  auVar1215._8_4_ = 0xb95e8083;
                  auVar1215._0_8_ = 0xb95e8083b95e8083;
                  auVar1215._12_4_ = 0xb95e8083;
                  auVar1215._16_4_ = 0xb95e8083;
                  auVar1215._20_4_ = 0xb95e8083;
                  auVar1215._24_4_ = 0xb95e8083;
                  auVar1215._28_4_ = 0xb95e8083;
                  for (uVar209 = 0; uVar209 != uVar229; uVar209 = uVar209 + 1) {
                    iVar207 = top_blob->elempack;
                    local_9c0._0_8_ = (long)local_920.c * (long)local_920.elempack;
                    auVar613 = _local_9c0;
                    local_b88 = (undefined1 (*) [32])
                                ((long)(int)((long)((ulong)(uint)((int)(uVar209 * 8) >> 0x1f) <<
                                                    0x20 | uVar209 * 8 & 0xffffffff) / (long)iVar207
                                            ) * top_blob->cstep * top_blob->elemsize +
                                (long)top_blob->data);
                    uVar259 = top_blob->w;
                    if (top_blob->w < 1) {
                      uVar259 = 0;
                    }
                    uVar247 = top_blob->h;
                    if (top_blob->h < 1) {
                      uVar247 = 0;
                    }
                    for (uVar242 = 0; uVar242 != uVar247; uVar242 = uVar242 + 1) {
                      for (uVar237 = 0; uVar237 != uVar259; uVar237 = uVar237 + 1) {
                        auVar1305 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar1218 = ZEXT864(0) << 0x40;
                        if ((void *)local_7c0._0_8_ != (void *)0x0) {
                          auVar1218 = ZEXT3264(*(undefined1 (*) [32])
                                                (local_7c0._0_8_ + uVar209 * 0x20));
                        }
                        pauVar236 = (undefined1 (*) [32])
                                    ((this->weight_data_tm).cstep * uVar209 *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        local_840._0_4_ = (uint)uVar237;
                        lVar216 = local_920.cstep * local_920.elemsize;
                        lVar201 = (long)local_920.w * uVar242 * local_818 * local_920.elemsize;
                        lVar256 = (long)local_920.data +
                                  (long)(int)(local_920.elempack * iVar249 * (uint)local_840) * 4 +
                                  lVar201;
                        local_960._0_8_ = lVar256;
                        uVar232 = 0;
                        auVar1452 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar1379 = ZEXT864(0) << 0x40;
                        while( true ) {
                          if ((int)local_9c0._0_4_ <= (int)((uint)uVar232 | 7)) break;
                          lVar215 = (int)((long)((ulong)(uint)((int)(uint)uVar232 >> 0x1f) << 0x20 |
                                                uVar232 & 0xffffffff) / (long)local_920.elempack) *
                                    lVar216;
                          if (local_920.elempack == 8) {
                            pauVar253 = pauVar236;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar202 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215);
                              auVar590._4_4_ = uVar211;
                              auVar590._0_4_ = uVar211;
                              auVar590._8_4_ = uVar211;
                              auVar590._12_4_ = uVar211;
                              auVar590._16_4_ = uVar211;
                              auVar590._20_4_ = uVar211;
                              auVar590._24_4_ = uVar211;
                              auVar590._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar590,auVar1218._0_32_,*pauVar253);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 4);
                              auVar1124._4_4_ = uVar211;
                              auVar1124._0_4_ = uVar211;
                              auVar1124._8_4_ = uVar211;
                              auVar1124._12_4_ = uVar211;
                              auVar1124._16_4_ = uVar211;
                              auVar1124._20_4_ = uVar211;
                              auVar1124._24_4_ = uVar211;
                              auVar1124._28_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar1124,auVar1379._0_32_,pauVar253[1]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 8);
                              auVar1293._4_4_ = uVar211;
                              auVar1293._0_4_ = uVar211;
                              auVar1293._8_4_ = uVar211;
                              auVar1293._12_4_ = uVar211;
                              auVar1293._16_4_ = uVar211;
                              auVar1293._20_4_ = uVar211;
                              auVar1293._24_4_ = uVar211;
                              auVar1293._28_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar1293,auVar1452._0_32_,pauVar253[2]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0xc);
                              auVar1366._4_4_ = uVar211;
                              auVar1366._0_4_ = uVar211;
                              auVar1366._8_4_ = uVar211;
                              auVar1366._12_4_ = uVar211;
                              auVar1366._16_4_ = uVar211;
                              auVar1366._20_4_ = uVar211;
                              auVar1366._24_4_ = uVar211;
                              auVar1366._28_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar1366,auVar1305._0_32_,pauVar253[3]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0x10);
                              auVar387._4_4_ = uVar211;
                              auVar387._0_4_ = uVar211;
                              auVar387._8_4_ = uVar211;
                              auVar387._12_4_ = uVar211;
                              auVar387._16_4_ = uVar211;
                              auVar387._20_4_ = uVar211;
                              auVar387._24_4_ = uVar211;
                              auVar387._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar387,ZEXT1632(auVar268),pauVar253[4]);
                              auVar1218 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0x14);
                              auVar488._4_4_ = uVar211;
                              auVar488._0_4_ = uVar211;
                              auVar488._8_4_ = uVar211;
                              auVar488._12_4_ = uVar211;
                              auVar488._16_4_ = uVar211;
                              auVar488._20_4_ = uVar211;
                              auVar488._24_4_ = uVar211;
                              auVar488._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar488,ZEXT1632(auVar310),pauVar253[5]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0x18);
                              auVar1503._4_4_ = uVar211;
                              auVar1503._0_4_ = uVar211;
                              auVar1503._8_4_ = uVar211;
                              auVar1503._12_4_ = uVar211;
                              auVar1503._16_4_ = uVar211;
                              auVar1503._20_4_ = uVar211;
                              auVar1503._24_4_ = uVar211;
                              auVar1503._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1503,ZEXT1632(auVar945),pauVar253[6]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0x1c);
                              auVar1049._4_4_ = uVar211;
                              auVar1049._0_4_ = uVar211;
                              auVar1049._8_4_ = uVar211;
                              auVar1049._12_4_ = uVar211;
                              auVar1049._16_4_ = uVar211;
                              auVar1049._20_4_ = uVar211;
                              auVar1049._24_4_ = uVar211;
                              auVar1049._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1049,ZEXT1632(auVar309),pauVar253[7]);
                              auVar1305 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 8;
                            }
                            pauVar236 = pauVar236 + uVar196 * 8;
                          }
                          if (local_920.elempack == 4) {
                            lVar202 = lVar208 * 4 + lVar215;
                            pauVar253 = pauVar236;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar217 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar215);
                              auVar591._4_4_ = uVar211;
                              auVar591._0_4_ = uVar211;
                              auVar591._8_4_ = uVar211;
                              auVar591._12_4_ = uVar211;
                              auVar591._16_4_ = uVar211;
                              auVar591._20_4_ = uVar211;
                              auVar591._24_4_ = uVar211;
                              auVar591._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar591,auVar1218._0_32_,*pauVar253);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar215 + 4);
                              auVar1125._4_4_ = uVar211;
                              auVar1125._0_4_ = uVar211;
                              auVar1125._8_4_ = uVar211;
                              auVar1125._12_4_ = uVar211;
                              auVar1125._16_4_ = uVar211;
                              auVar1125._20_4_ = uVar211;
                              auVar1125._24_4_ = uVar211;
                              auVar1125._28_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar1125,auVar1379._0_32_,pauVar253[1]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar215 + 8);
                              auVar1294._4_4_ = uVar211;
                              auVar1294._0_4_ = uVar211;
                              auVar1294._8_4_ = uVar211;
                              auVar1294._12_4_ = uVar211;
                              auVar1294._16_4_ = uVar211;
                              auVar1294._20_4_ = uVar211;
                              auVar1294._24_4_ = uVar211;
                              auVar1294._28_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar1294,auVar1452._0_32_,pauVar253[2]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar215 + 0xc);
                              auVar1367._4_4_ = uVar211;
                              auVar1367._0_4_ = uVar211;
                              auVar1367._8_4_ = uVar211;
                              auVar1367._12_4_ = uVar211;
                              auVar1367._16_4_ = uVar211;
                              auVar1367._20_4_ = uVar211;
                              auVar1367._24_4_ = uVar211;
                              auVar1367._28_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar1367,auVar1305._0_32_,pauVar253[3]);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar202);
                              auVar388._4_4_ = uVar211;
                              auVar388._0_4_ = uVar211;
                              auVar388._8_4_ = uVar211;
                              auVar388._12_4_ = uVar211;
                              auVar388._16_4_ = uVar211;
                              auVar388._20_4_ = uVar211;
                              auVar388._24_4_ = uVar211;
                              auVar388._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar388,ZEXT1632(auVar268),pauVar253[4]);
                              auVar1218 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar202 + 4);
                              auVar489._4_4_ = uVar211;
                              auVar489._0_4_ = uVar211;
                              auVar489._8_4_ = uVar211;
                              auVar489._12_4_ = uVar211;
                              auVar489._16_4_ = uVar211;
                              auVar489._20_4_ = uVar211;
                              auVar489._24_4_ = uVar211;
                              auVar489._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar489,ZEXT1632(auVar310),pauVar253[5]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar202 + 8);
                              auVar1504._4_4_ = uVar211;
                              auVar1504._0_4_ = uVar211;
                              auVar1504._8_4_ = uVar211;
                              auVar1504._12_4_ = uVar211;
                              auVar1504._16_4_ = uVar211;
                              auVar1504._20_4_ = uVar211;
                              auVar1504._24_4_ = uVar211;
                              auVar1504._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1504,ZEXT1632(auVar945),pauVar253[6]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar217 * 4 + lVar202 + 0xc);
                              auVar1050._4_4_ = uVar211;
                              auVar1050._0_4_ = uVar211;
                              auVar1050._8_4_ = uVar211;
                              auVar1050._12_4_ = uVar211;
                              auVar1050._16_4_ = uVar211;
                              auVar1050._20_4_ = uVar211;
                              auVar1050._24_4_ = uVar211;
                              auVar1050._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1050,ZEXT1632(auVar309),pauVar253[7]);
                              auVar1305 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 8;
                            }
                            pauVar236 = pauVar236 + uVar196 * 8;
                          }
                          if (local_920.elempack == 1) {
                            pauVar253 = pauVar236;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              iVar193 = *(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar256 + (long)iVar193 * 4 + lVar215);
                              auVar592._4_4_ = uVar211;
                              auVar592._0_4_ = uVar211;
                              auVar592._8_4_ = uVar211;
                              auVar592._12_4_ = uVar211;
                              auVar592._16_4_ = uVar211;
                              auVar592._20_4_ = uVar211;
                              auVar592._24_4_ = uVar211;
                              auVar592._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar592,auVar1218._0_32_,*pauVar253);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(local_b80 + iVar193) * 4 + lVar215);
                              auVar1126._4_4_ = uVar211;
                              auVar1126._0_4_ = uVar211;
                              auVar1126._8_4_ = uVar211;
                              auVar1126._12_4_ = uVar211;
                              auVar1126._16_4_ = uVar211;
                              auVar1126._20_4_ = uVar211;
                              auVar1126._24_4_ = uVar211;
                              auVar1126._28_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar1126,auVar1379._0_32_,pauVar253[1]);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar193 + iVar190) * 4 + lVar215);
                              auVar1295._4_4_ = uVar211;
                              auVar1295._0_4_ = uVar211;
                              auVar1295._8_4_ = uVar211;
                              auVar1295._12_4_ = uVar211;
                              auVar1295._16_4_ = uVar211;
                              auVar1295._20_4_ = uVar211;
                              auVar1295._24_4_ = uVar211;
                              auVar1295._28_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar1295,auVar1452._0_32_,pauVar253[2]);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar193 + iVar192) * 4 + lVar215);
                              auVar1368._4_4_ = uVar211;
                              auVar1368._0_4_ = uVar211;
                              auVar1368._8_4_ = uVar211;
                              auVar1368._12_4_ = uVar211;
                              auVar1368._16_4_ = uVar211;
                              auVar1368._20_4_ = uVar211;
                              auVar1368._24_4_ = uVar211;
                              auVar1368._28_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar1368,auVar1305._0_32_,pauVar253[3]);
                              uVar211 = *(undefined4 *)
                                         (lVar256 +
                                         (long)(iVar193 + (int)(float)local_a40) * 4 + lVar215);
                              auVar389._4_4_ = uVar211;
                              auVar389._0_4_ = uVar211;
                              auVar389._8_4_ = uVar211;
                              auVar389._12_4_ = uVar211;
                              auVar389._16_4_ = uVar211;
                              auVar389._20_4_ = uVar211;
                              auVar389._24_4_ = uVar211;
                              auVar389._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar389,ZEXT1632(auVar268),pauVar253[4]);
                              auVar1218 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 +
                                         (long)(iVar193 + (int)(float)local_a60) * 4 + lVar215);
                              auVar490._4_4_ = uVar211;
                              auVar490._0_4_ = uVar211;
                              auVar490._8_4_ = uVar211;
                              auVar490._12_4_ = uVar211;
                              auVar490._16_4_ = uVar211;
                              auVar490._20_4_ = uVar211;
                              auVar490._24_4_ = uVar211;
                              auVar490._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar490,ZEXT1632(auVar310),pauVar253[5]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar188 + iVar193) * 4 + lVar215);
                              auVar1505._4_4_ = uVar211;
                              auVar1505._0_4_ = uVar211;
                              auVar1505._8_4_ = uVar211;
                              auVar1505._12_4_ = uVar211;
                              auVar1505._16_4_ = uVar211;
                              auVar1505._20_4_ = uVar211;
                              auVar1505._24_4_ = uVar211;
                              auVar1505._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1505,ZEXT1632(auVar945),pauVar253[6]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar193 + iVar239) * 4 + lVar215);
                              auVar1051._4_4_ = uVar211;
                              auVar1051._0_4_ = uVar211;
                              auVar1051._8_4_ = uVar211;
                              auVar1051._12_4_ = uVar211;
                              auVar1051._16_4_ = uVar211;
                              auVar1051._20_4_ = uVar211;
                              auVar1051._24_4_ = uVar211;
                              auVar1051._28_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1051,ZEXT1632(auVar309),pauVar253[7]);
                              auVar1305 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 8;
                            }
                            pauVar236 = pauVar236 + uVar196 * 8;
                          }
                          uVar232 = uVar232 + 8;
                        }
                        for (; (int)((uint)uVar232 | 3) < (int)local_9c0._0_4_;
                            uVar232 = uVar232 + 4) {
                          lVar215 = (int)((long)((ulong)(uint)((int)(uint)uVar232 >> 0x1f) << 0x20 |
                                                uVar232 & 0xffffffff) / (long)local_920.elempack) *
                                    lVar216;
                          if (local_920.elempack == 4) {
                            pauVar253 = pauVar236;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar202 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215);
                              auVar593._4_4_ = uVar211;
                              auVar593._0_4_ = uVar211;
                              auVar593._8_4_ = uVar211;
                              auVar593._12_4_ = uVar211;
                              auVar593._16_4_ = uVar211;
                              auVar593._20_4_ = uVar211;
                              auVar593._24_4_ = uVar211;
                              auVar593._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1218._0_32_,auVar593,*pauVar253);
                              auVar1218 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 4);
                              auVar304._4_4_ = uVar211;
                              auVar304._0_4_ = uVar211;
                              auVar304._8_4_ = uVar211;
                              auVar304._12_4_ = uVar211;
                              auVar304._16_4_ = uVar211;
                              auVar304._20_4_ = uVar211;
                              auVar304._24_4_ = uVar211;
                              auVar304._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1379._0_32_,auVar304,pauVar253[1]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 8);
                              auVar594._4_4_ = uVar211;
                              auVar594._0_4_ = uVar211;
                              auVar594._8_4_ = uVar211;
                              auVar594._12_4_ = uVar211;
                              auVar594._16_4_ = uVar211;
                              auVar594._20_4_ = uVar211;
                              auVar594._24_4_ = uVar211;
                              auVar594._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1452._0_32_,auVar594,pauVar253[2]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar256 + lVar202 * 4 + lVar215 + 0xc);
                              auVar595._4_4_ = uVar211;
                              auVar595._0_4_ = uVar211;
                              auVar595._8_4_ = uVar211;
                              auVar595._12_4_ = uVar211;
                              auVar595._16_4_ = uVar211;
                              auVar595._20_4_ = uVar211;
                              auVar595._24_4_ = uVar211;
                              auVar595._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1305._0_32_,auVar595,pauVar253[3]);
                              auVar1305 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 4;
                            }
                            pauVar236 = pauVar236 + uVar196 * 4;
                          }
                          if (local_920.elempack == 1) {
                            pauVar253 = pauVar236;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              iVar193 = *(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar256 + (long)iVar193 * 4 + lVar215);
                              auVar596._4_4_ = uVar211;
                              auVar596._0_4_ = uVar211;
                              auVar596._8_4_ = uVar211;
                              auVar596._12_4_ = uVar211;
                              auVar596._16_4_ = uVar211;
                              auVar596._20_4_ = uVar211;
                              auVar596._24_4_ = uVar211;
                              auVar596._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1218._0_32_,auVar596,*pauVar253);
                              auVar1218 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(local_b80 + iVar193) * 4 + lVar215);
                              auVar597._4_4_ = uVar211;
                              auVar597._0_4_ = uVar211;
                              auVar597._8_4_ = uVar211;
                              auVar597._12_4_ = uVar211;
                              auVar597._16_4_ = uVar211;
                              auVar597._20_4_ = uVar211;
                              auVar597._24_4_ = uVar211;
                              auVar597._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1379._0_32_,auVar597,pauVar253[1]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar190 + iVar193) * 4 + lVar215);
                              auVar598._4_4_ = uVar211;
                              auVar598._0_4_ = uVar211;
                              auVar598._8_4_ = uVar211;
                              auVar598._12_4_ = uVar211;
                              auVar598._16_4_ = uVar211;
                              auVar598._20_4_ = uVar211;
                              auVar598._24_4_ = uVar211;
                              auVar598._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1452._0_32_,auVar598,pauVar253[2]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar256 + (long)(iVar193 + iVar192) * 4 + lVar215);
                              auVar599._4_4_ = uVar211;
                              auVar599._0_4_ = uVar211;
                              auVar599._8_4_ = uVar211;
                              auVar599._12_4_ = uVar211;
                              auVar599._16_4_ = uVar211;
                              auVar599._20_4_ = uVar211;
                              auVar599._24_4_ = uVar211;
                              auVar599._28_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1305._0_32_,auVar599,pauVar253[3]);
                              auVar1305 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 4;
                            }
                            pauVar236 = pauVar236 + uVar196 * 4;
                          }
                        }
                        lVar201 = uVar237 * (long)iVar249 * 4 + lVar201;
                        for (; (long)(uVar232 | 1) < (long)local_9c0._0_8_; uVar232 = uVar232 + 2) {
                          lVar256 = uVar232 * lVar216 + lVar201;
                          auVar243 = local_660;
                          for (piVar222 = (int *)0x0; piVar255 != piVar222;
                              piVar222 = piVar222 + 0x10) {
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data + (long)*(int *)auVar243 * 4 + lVar256)
                            ;
                            auVar600._4_4_ = uVar211;
                            auVar600._0_4_ = uVar211;
                            auVar600._8_4_ = uVar211;
                            auVar600._12_4_ = uVar211;
                            auVar600._16_4_ = uVar211;
                            auVar600._20_4_ = uVar211;
                            auVar600._24_4_ = uVar211;
                            auVar600._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1218._0_32_,auVar600,
                                                       *(undefined1 (*) [32])
                                                        (*pauVar236 + (long)piVar222));
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (*(int *)auVar243 + lVar208) * 4 + lVar256);
                            auVar601._4_4_ = uVar211;
                            auVar601._0_4_ = uVar211;
                            auVar601._8_4_ = uVar211;
                            auVar601._12_4_ = uVar211;
                            auVar601._16_4_ = uVar211;
                            auVar601._20_4_ = uVar211;
                            auVar601._24_4_ = uVar211;
                            auVar601._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1379._0_32_,auVar601,
                                                       *(undefined1 (*) [32])
                                                        (pauVar236[1] + (long)piVar222));
                            auVar1379 = ZEXT1664(auVar268);
                            auVar243 = (undefined1  [8])((long)auVar243 + 4);
                          }
                          pauVar236 = pauVar236 + uVar196 * 2;
                        }
                        for (; (long)uVar232 < (long)local_9c0._0_8_; uVar232 = uVar232 + 1) {
                          for (lVar256 = 0; lVar234 - lVar256 != 0; lVar256 = lVar256 + 4) {
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (long)*(int *)((long)local_660 + lVar256) * 4 +
                                       uVar232 * lVar216 + lVar201);
                            auVar602._4_4_ = uVar211;
                            auVar602._0_4_ = uVar211;
                            auVar602._8_4_ = uVar211;
                            auVar602._12_4_ = uVar211;
                            auVar602._16_4_ = uVar211;
                            auVar602._20_4_ = uVar211;
                            auVar602._24_4_ = uVar211;
                            auVar602._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1218._0_32_,auVar602,
                                                       *(undefined1 (*) [32])
                                                        (*pauVar236 + lVar256 * 8));
                            auVar1218 = ZEXT1664(auVar268);
                          }
                          pauVar236 = pauVar236 + uVar196;
                        }
                        fVar248 = auVar1452._0_4_ + auVar1305._0_4_ +
                                  auVar1379._0_4_ + auVar1218._0_4_;
                        fVar220 = auVar1452._4_4_ + auVar1305._4_4_ +
                                  auVar1379._4_4_ + auVar1218._4_4_;
                        auVar390._0_8_ = CONCAT44(fVar220,fVar248);
                        auVar390._8_4_ =
                             auVar1452._8_4_ + auVar1305._8_4_ + auVar1379._8_4_ + auVar1218._8_4_;
                        auVar390._12_4_ =
                             auVar1452._12_4_ + auVar1305._12_4_ +
                             auVar1379._12_4_ + auVar1218._12_4_;
                        auVar390._16_4_ =
                             auVar1452._16_4_ + auVar1305._16_4_ +
                             auVar1379._16_4_ + auVar1218._16_4_;
                        auVar390._20_4_ =
                             auVar1452._20_4_ + auVar1305._20_4_ +
                             auVar1379._20_4_ + auVar1218._20_4_;
                        auVar390._24_4_ =
                             auVar1452._24_4_ + auVar1305._24_4_ +
                             auVar1379._24_4_ + auVar1218._24_4_;
                        auVar390._28_4_ =
                             auVar1452._28_4_ + auVar1305._28_4_ +
                             auVar1379._28_4_ + auVar1218._28_4_;
                        auVar593 = auVar390;
                        if (5 < local_760 - 1U) goto switchD_001c39cd_caseD_1;
                        auVar304 = auVar1060._0_32_;
                        auVar593 = vmaxps_avx(auVar390,auVar304);
                        auVar594 = auVar1130._0_32_;
                        switch(local_760) {
                        case 2:
                          auVar304 = vminps_avx(auVar390,auVar304);
                          uVar211 = *(this->super_Convolution).activation_params.data;
                          auVar603._4_4_ = uVar211;
                          auVar603._0_4_ = uVar211;
                          auVar603._8_4_ = uVar211;
                          auVar603._12_4_ = uVar211;
                          auVar603._16_4_ = uVar211;
                          auVar603._20_4_ = uVar211;
                          auVar603._24_4_ = uVar211;
                          auVar603._28_4_ = uVar211;
                          auVar268 = vfmadd231ps_fma(auVar593,auVar304,auVar603);
                          auVar593 = ZEXT1632(auVar268);
                          break;
                        case 3:
                          puVar254 = (undefined4 *)(this->super_Convolution).activation_params.data;
                          uVar211 = *puVar254;
                          auVar495._4_4_ = uVar211;
                          auVar495._0_4_ = uVar211;
                          auVar495._8_4_ = uVar211;
                          auVar495._12_4_ = uVar211;
                          auVar495._16_4_ = uVar211;
                          auVar495._20_4_ = uVar211;
                          auVar495._24_4_ = uVar211;
                          auVar495._28_4_ = uVar211;
                          uVar211 = puVar254[1];
                          auVar609._4_4_ = uVar211;
                          auVar609._0_4_ = uVar211;
                          auVar609._8_4_ = uVar211;
                          auVar609._12_4_ = uVar211;
                          auVar609._16_4_ = uVar211;
                          auVar609._20_4_ = uVar211;
                          auVar609._24_4_ = uVar211;
                          auVar609._28_4_ = uVar211;
                          auVar593 = vmaxps_avx(auVar390,auVar495);
                          auVar593 = vminps_avx(auVar593,auVar609);
                          break;
                        case 4:
                          auVar391._0_8_ = auVar390._0_8_ ^ 0x8000000080000000;
                          auVar391._8_4_ = -auVar390._8_4_;
                          auVar391._12_4_ = -auVar390._12_4_;
                          auVar391._16_4_ = -auVar390._16_4_;
                          auVar391._20_4_ = -auVar390._20_4_;
                          auVar391._24_4_ = -auVar390._24_4_;
                          auVar391._28_4_ = -auVar390._28_4_;
                          auVar496._8_4_ = 0x42b0c0a5;
                          auVar496._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar496._12_4_ = 0x42b0c0a5;
                          auVar496._16_4_ = 0x42b0c0a5;
                          auVar496._20_4_ = 0x42b0c0a5;
                          auVar496._24_4_ = 0x42b0c0a5;
                          auVar496._28_4_ = 0x42b0c0a5;
                          auVar593 = vminps_avx(auVar391,auVar496);
                          auVar497._8_4_ = 0xc2b0c0a5;
                          auVar497._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar497._12_4_ = 0xc2b0c0a5;
                          auVar497._16_4_ = 0xc2b0c0a5;
                          auVar497._20_4_ = 0xc2b0c0a5;
                          auVar497._24_4_ = 0xc2b0c0a5;
                          auVar497._28_4_ = 0xc2b0c0a5;
                          auVar304 = vmaxps_avx(auVar593,auVar497);
                          auVar498._8_4_ = 0x3fb8aa3b;
                          auVar498._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar498._12_4_ = 0x3fb8aa3b;
                          auVar498._16_4_ = 0x3fb8aa3b;
                          auVar498._20_4_ = 0x3fb8aa3b;
                          auVar498._24_4_ = 0x3fb8aa3b;
                          auVar498._28_4_ = 0x3fb8aa3b;
                          auVar268 = vfmadd213ps_fma(auVar498,auVar304,auVar594);
                          auVar595 = vroundps_avx(ZEXT1632(auVar268),1);
                          auVar593 = vcmpps_avx(ZEXT1632(auVar268),auVar595,1);
                          auVar593 = vandps_avx(auVar593,auVar376);
                          auVar593 = vsubps_avx(auVar595,auVar593);
                          auVar610._8_4_ = 0x3f318000;
                          auVar610._0_8_ = 0x3f3180003f318000;
                          auVar610._12_4_ = 0x3f318000;
                          auVar610._16_4_ = 0x3f318000;
                          auVar610._20_4_ = 0x3f318000;
                          auVar610._24_4_ = 0x3f318000;
                          auVar610._28_4_ = 0x3f318000;
                          auVar268 = vfmsub231ps_fma(auVar304,auVar593,auVar610);
                          auVar611._8_4_ = 0x395e8083;
                          auVar611._0_8_ = 0x395e8083395e8083;
                          auVar611._12_4_ = 0x395e8083;
                          auVar611._16_4_ = 0x395e8083;
                          auVar611._20_4_ = 0x395e8083;
                          auVar611._24_4_ = 0x395e8083;
                          auVar611._28_4_ = 0x395e8083;
                          auVar310 = vfmsub231ps_fma(ZEXT1632(auVar268),auVar593,auVar611);
                          auVar304 = ZEXT1632(auVar310);
                          auVar23._28_4_ = 0x395e8083;
                          auVar23._0_28_ =
                               ZEXT1628(CONCAT412(auVar310._12_4_ * auVar310._12_4_,
                                                  CONCAT48(auVar310._8_4_ * auVar310._8_4_,
                                                           CONCAT44(auVar310._4_4_ * auVar310._4_4_,
                                                                    auVar310._0_4_ * auVar310._0_4_)
                                                          )));
                          auVar1057._8_4_ = 0x39506967;
                          auVar1057._0_8_ = 0x3950696739506967;
                          auVar1057._12_4_ = 0x39506967;
                          auVar1057._16_4_ = 0x39506967;
                          auVar1057._20_4_ = 0x39506967;
                          auVar1057._24_4_ = 0x39506967;
                          auVar1057._28_4_ = 0x39506967;
                          auVar859._8_4_ = 0x3ab743ce;
                          auVar859._0_8_ = 0x3ab743ce3ab743ce;
                          auVar859._12_4_ = 0x3ab743ce;
                          auVar859._16_4_ = 0x3ab743ce;
                          auVar859._20_4_ = 0x3ab743ce;
                          auVar859._24_4_ = 0x3ab743ce;
                          auVar859._28_4_ = 0x3ab743ce;
                          auVar268 = vfmadd213ps_fma(auVar1057,auVar304,auVar859);
                          auVar860._8_4_ = 0x3c088908;
                          auVar860._0_8_ = 0x3c0889083c088908;
                          auVar860._12_4_ = 0x3c088908;
                          auVar860._16_4_ = 0x3c088908;
                          auVar860._20_4_ = 0x3c088908;
                          auVar860._24_4_ = 0x3c088908;
                          auVar860._28_4_ = 0x3c088908;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar860);
                          auVar861._8_4_ = 0x3d2aa9c1;
                          auVar861._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar861._12_4_ = 0x3d2aa9c1;
                          auVar861._16_4_ = 0x3d2aa9c1;
                          auVar861._20_4_ = 0x3d2aa9c1;
                          auVar861._24_4_ = 0x3d2aa9c1;
                          auVar861._28_4_ = 0x3d2aa9c1;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar861);
                          auVar862._8_4_ = 0x3e2aaaaa;
                          auVar862._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar862._12_4_ = 0x3e2aaaaa;
                          auVar862._16_4_ = 0x3e2aaaaa;
                          auVar862._20_4_ = 0x3e2aaaaa;
                          auVar862._24_4_ = 0x3e2aaaaa;
                          auVar862._28_4_ = 0x3e2aaaaa;
                          auVar304 = ZEXT1632(auVar310);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar862);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar594);
                          auVar945 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar23,auVar304);
                          auVar317._0_4_ = (int)auVar593._0_4_;
                          auVar317._4_4_ = (int)auVar593._4_4_;
                          auVar317._8_4_ = (int)auVar593._8_4_;
                          auVar317._12_4_ = (int)auVar593._12_4_;
                          auVar392._16_4_ = (int)auVar593._16_4_;
                          auVar392._0_16_ = auVar317;
                          auVar392._20_4_ = (int)auVar593._20_4_;
                          auVar392._24_4_ = (int)auVar593._24_4_;
                          auVar392._28_4_ = (int)auVar593._28_4_;
                          auVar310 = vpslld_avx(auVar317,0x17);
                          auVar268 = vpslld_avx(auVar392._16_16_,0x17);
                          auVar523._8_4_ = 0x3f800000;
                          auVar523._0_8_ = 0x3f8000003f800000;
                          auVar523._12_4_ = 0x3f800000;
                          auVar268 = vpaddd_avx(auVar268,auVar523);
                          auVar310 = vpaddd_avx(auVar310,auVar523);
                          auVar393._16_16_ = auVar268;
                          auVar393._0_16_ = auVar310;
                          auVar499._0_4_ = auVar945._0_4_ + 1.0;
                          auVar499._4_4_ = auVar945._4_4_ + 1.0;
                          auVar499._8_4_ = auVar945._8_4_ + 1.0;
                          auVar499._12_4_ = auVar945._12_4_ + 1.0;
                          auVar499._16_4_ = 0x3f800000;
                          auVar499._20_4_ = 0x3f800000;
                          auVar499._24_4_ = 0x3f800000;
                          auVar499._28_4_ = 0x3f800000;
                          auVar268 = vfmadd213ps_fma(auVar393,auVar499,auVar376);
                          auVar593 = vdivps_avx(auVar376,ZEXT1632(auVar268));
                          break;
                        case 5:
                          auVar593 = vminps_avx(auVar1449,auVar390);
                          auVar304 = vmaxps_avx(auVar1485,auVar593);
                          auVar604._8_4_ = 0x3fb8aa3b;
                          auVar604._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar604._12_4_ = 0x3fb8aa3b;
                          auVar604._16_4_ = 0x3fb8aa3b;
                          auVar604._20_4_ = 0x3fb8aa3b;
                          auVar604._24_4_ = 0x3fb8aa3b;
                          auVar604._28_4_ = 0x3fb8aa3b;
                          auVar268 = vfmadd213ps_fma(auVar604,auVar304,auVar594);
                          auVar595 = vroundps_avx(ZEXT1632(auVar268),1);
                          auVar593 = vcmpps_avx(ZEXT1632(auVar268),auVar595,1);
                          auVar593 = vandps_avx(auVar593,auVar376);
                          auVar593 = vsubps_avx(auVar595,auVar593);
                          auVar743._8_4_ = 0x3f318000;
                          auVar743._0_8_ = 0x3f3180003f318000;
                          auVar743._12_4_ = 0x3f318000;
                          auVar743._16_4_ = 0x3f318000;
                          auVar743._20_4_ = 0x3f318000;
                          auVar743._24_4_ = 0x3f318000;
                          auVar743._28_4_ = 0x3f318000;
                          auVar268 = vfmsub231ps_fma(auVar304,auVar593,auVar743);
                          auVar310 = vfnmsub231ps_fma(ZEXT1632(auVar268),auVar593,auVar1215);
                          auVar304 = ZEXT1632(auVar310);
                          auVar20._28_4_ = auVar595._28_4_;
                          auVar20._0_28_ =
                               ZEXT1628(CONCAT412(auVar310._12_4_ * auVar310._12_4_,
                                                  CONCAT48(auVar310._8_4_ * auVar310._8_4_,
                                                           CONCAT44(auVar310._4_4_ * auVar310._4_4_,
                                                                    auVar310._0_4_ * auVar310._0_4_)
                                                          )));
                          auVar999._8_4_ = 0x39506967;
                          auVar999._0_8_ = 0x3950696739506967;
                          auVar999._12_4_ = 0x39506967;
                          auVar999._16_4_ = 0x39506967;
                          auVar999._20_4_ = 0x39506967;
                          auVar999._24_4_ = 0x39506967;
                          auVar999._28_4_ = 0x39506967;
                          auVar857._8_4_ = 0x3ab743ce;
                          auVar857._0_8_ = 0x3ab743ce3ab743ce;
                          auVar857._12_4_ = 0x3ab743ce;
                          auVar857._16_4_ = 0x3ab743ce;
                          auVar857._20_4_ = 0x3ab743ce;
                          auVar857._24_4_ = 0x3ab743ce;
                          auVar857._28_4_ = 0x3ab743ce;
                          auVar268 = vfmadd213ps_fma(auVar999,auVar304,auVar857);
                          auVar1296._8_4_ = 0x3c088908;
                          auVar1296._0_8_ = 0x3c0889083c088908;
                          auVar1296._12_4_ = 0x3c088908;
                          auVar1296._16_4_ = 0x3c088908;
                          auVar1296._20_4_ = 0x3c088908;
                          auVar1296._24_4_ = 0x3c088908;
                          auVar1296._28_4_ = 0x3c088908;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1296);
                          auVar1297._8_4_ = 0x3d2aa9c1;
                          auVar1297._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar1297._12_4_ = 0x3d2aa9c1;
                          auVar1297._16_4_ = 0x3d2aa9c1;
                          auVar1297._20_4_ = 0x3d2aa9c1;
                          auVar1297._24_4_ = 0x3d2aa9c1;
                          auVar1297._28_4_ = 0x3d2aa9c1;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1297);
                          auVar1298._8_4_ = 0x3e2aaaaa;
                          auVar1298._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar1298._12_4_ = 0x3e2aaaaa;
                          auVar1298._16_4_ = 0x3e2aaaaa;
                          auVar1298._20_4_ = 0x3e2aaaaa;
                          auVar1298._24_4_ = 0x3e2aaaaa;
                          auVar1298._28_4_ = 0x3e2aaaaa;
                          auVar304 = ZEXT1632(auVar310);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1298);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar594);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar20,auVar304);
                          auVar1052._0_4_ = auVar268._0_4_ + 1.0;
                          auVar1052._4_4_ = auVar268._4_4_ + 1.0;
                          auVar1052._8_4_ = auVar268._8_4_ + 1.0;
                          auVar1052._12_4_ = auVar268._12_4_ + 1.0;
                          auVar1052._16_4_ = 0x3f800000;
                          auVar1052._20_4_ = 0x3f800000;
                          auVar1052._24_4_ = 0x3f800000;
                          auVar1052._28_4_ = 0x3f800000;
                          auVar268._0_4_ = (int)auVar593._0_4_;
                          auVar268._4_4_ = (int)auVar593._4_4_;
                          auVar268._8_4_ = (int)auVar593._8_4_;
                          auVar268._12_4_ = (int)auVar593._12_4_;
                          auVar491._16_4_ = (int)auVar593._16_4_;
                          auVar491._0_16_ = auVar268;
                          auVar491._20_4_ = (int)auVar593._20_4_;
                          auVar491._24_4_ = (int)auVar593._24_4_;
                          auVar491._28_4_ = (int)auVar593._28_4_;
                          auVar310 = vpslld_avx(auVar268,0x17);
                          auVar268 = vpslld_avx(auVar491._16_16_,0x17);
                          auVar1259._8_4_ = 0x3f800000;
                          auVar1259._0_8_ = 0x3f8000003f800000;
                          auVar1259._12_4_ = 0x3f800000;
                          auVar268 = vpaddd_avx(auVar1259,auVar268);
                          auVar310 = vpaddd_avx(auVar1259,auVar310);
                          auVar492._16_16_ = auVar268;
                          auVar492._0_16_ = auVar310;
                          auVar945 = vfmadd213ps_fma(auVar492,auVar1052,auVar376);
                          auVar605._8_4_ = 0x800000;
                          auVar605._0_8_ = 0x80000000800000;
                          auVar605._12_4_ = 0x800000;
                          auVar605._16_4_ = 0x800000;
                          auVar605._20_4_ = 0x800000;
                          auVar605._24_4_ = 0x800000;
                          auVar605._28_4_ = 0x800000;
                          auVar593 = vmaxps_avx(ZEXT1632(auVar945),auVar605);
                          auVar310 = vpsrld_avx(auVar593._0_16_,0x17);
                          auVar268 = vpsrld_avx(auVar593._16_16_,0x17);
                          auVar1053._8_4_ = 0x807fffff;
                          auVar1053._0_8_ = 0x807fffff807fffff;
                          auVar1053._12_4_ = 0x807fffff;
                          auVar1053._16_4_ = 0x807fffff;
                          auVar1053._20_4_ = 0x807fffff;
                          auVar1053._24_4_ = 0x807fffff;
                          auVar1053._28_4_ = 0x807fffff;
                          auVar593 = vandps_avx(auVar1053,auVar593);
                          auVar595 = vorps_avx(auVar593,auVar594);
                          auVar1054._8_4_ = 0x3f3504f3;
                          auVar1054._0_8_ = 0x3f3504f33f3504f3;
                          auVar1054._12_4_ = 0x3f3504f3;
                          auVar1054._16_4_ = 0x3f3504f3;
                          auVar1054._20_4_ = 0x3f3504f3;
                          auVar1054._24_4_ = 0x3f3504f3;
                          auVar1054._28_4_ = 0x3f3504f3;
                          auVar304 = vcmpps_avx(auVar1054,auVar595,2);
                          auVar593 = vandnps_avx(auVar304,auVar595);
                          auVar858._8_4_ = 0xbf800000;
                          auVar858._0_8_ = 0xbf800000bf800000;
                          auVar858._12_4_ = 0xbf800000;
                          auVar858._16_4_ = 0xbf800000;
                          auVar858._20_4_ = 0xbf800000;
                          auVar858._24_4_ = 0xbf800000;
                          auVar858._28_4_ = 0xbf800000;
                          auVar1055._0_4_ = auVar593._0_4_ + auVar595._0_4_ + -1.0;
                          auVar1055._4_4_ = auVar593._4_4_ + auVar595._4_4_ + -1.0;
                          auVar1055._8_4_ = auVar593._8_4_ + auVar595._8_4_ + -1.0;
                          auVar1055._12_4_ = auVar593._12_4_ + auVar595._12_4_ + -1.0;
                          auVar1055._16_4_ = auVar593._16_4_ + auVar595._16_4_ + -1.0;
                          auVar1055._20_4_ = auVar593._20_4_ + auVar595._20_4_ + -1.0;
                          auVar1055._24_4_ = auVar593._24_4_ + auVar595._24_4_ + -1.0;
                          auVar1055._28_4_ = auVar593._28_4_ + auVar595._28_4_ + -1.0;
                          auVar268 = vpsubd_avx(auVar268,auVar304._16_16_);
                          auVar1168._8_4_ = 0xffffff81;
                          auVar1168._0_8_ = 0xffffff81ffffff81;
                          auVar1168._12_4_ = 0xffffff81;
                          auVar268 = vpaddd_avx(auVar1168,auVar268);
                          auVar310 = vpsubd_avx(auVar310,auVar304._0_16_);
                          auVar310 = vpaddd_avx(auVar310,auVar1168);
                          auVar606._16_16_ = auVar268;
                          auVar606._0_16_ = auVar310;
                          auVar1127._0_4_ = auVar1055._0_4_ * auVar1055._0_4_;
                          auVar1127._4_4_ = auVar1055._4_4_ * auVar1055._4_4_;
                          auVar1127._8_4_ = auVar1055._8_4_ * auVar1055._8_4_;
                          auVar1127._12_4_ = auVar1055._12_4_ * auVar1055._12_4_;
                          auVar1127._16_4_ = auVar1055._16_4_ * auVar1055._16_4_;
                          auVar1127._20_4_ = auVar1055._20_4_ * auVar1055._20_4_;
                          auVar1127._24_4_ = auVar1055._24_4_ * auVar1055._24_4_;
                          auVar1127._28_4_ = 0;
                          auVar1299._8_4_ = 0x3d9021bb;
                          auVar1299._0_8_ = 0x3d9021bb3d9021bb;
                          auVar1299._12_4_ = 0x3d9021bb;
                          auVar1299._16_4_ = 0x3d9021bb;
                          auVar1299._20_4_ = 0x3d9021bb;
                          auVar1299._24_4_ = 0x3d9021bb;
                          auVar1299._28_4_ = 0x3d9021bb;
                          auVar1369._8_4_ = 0xbdebd1b8;
                          auVar1369._0_8_ = 0xbdebd1b8bdebd1b8;
                          auVar1369._12_4_ = 0xbdebd1b8;
                          auVar1369._16_4_ = 0xbdebd1b8;
                          auVar1369._20_4_ = 0xbdebd1b8;
                          auVar1369._24_4_ = 0xbdebd1b8;
                          auVar1369._28_4_ = 0xbdebd1b8;
                          auVar268 = vfmadd213ps_fma(auVar1299,auVar1055,auVar1369);
                          auVar1370._8_4_ = 0x3def251a;
                          auVar1370._0_8_ = 0x3def251a3def251a;
                          auVar1370._12_4_ = 0x3def251a;
                          auVar1370._16_4_ = 0x3def251a;
                          auVar1370._20_4_ = 0x3def251a;
                          auVar1370._24_4_ = 0x3def251a;
                          auVar1370._28_4_ = 0x3def251a;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1370);
                          auVar1371._8_4_ = 0xbdfe5d4f;
                          auVar1371._0_8_ = 0xbdfe5d4fbdfe5d4f;
                          auVar1371._12_4_ = 0xbdfe5d4f;
                          auVar1371._16_4_ = 0xbdfe5d4f;
                          auVar1371._20_4_ = 0xbdfe5d4f;
                          auVar1371._24_4_ = 0xbdfe5d4f;
                          auVar1371._28_4_ = 0xbdfe5d4f;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1371);
                          auVar1372._8_4_ = 0x3e11e9bf;
                          auVar1372._0_8_ = 0x3e11e9bf3e11e9bf;
                          auVar1372._12_4_ = 0x3e11e9bf;
                          auVar1372._16_4_ = 0x3e11e9bf;
                          auVar1372._20_4_ = 0x3e11e9bf;
                          auVar1372._24_4_ = 0x3e11e9bf;
                          auVar1372._28_4_ = 0x3e11e9bf;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1372);
                          auVar1373._8_4_ = 0xbe2aae50;
                          auVar1373._0_8_ = 0xbe2aae50be2aae50;
                          auVar1373._12_4_ = 0xbe2aae50;
                          auVar1373._16_4_ = 0xbe2aae50;
                          auVar1373._20_4_ = 0xbe2aae50;
                          auVar1373._24_4_ = 0xbe2aae50;
                          auVar1373._28_4_ = 0xbe2aae50;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1373);
                          auVar1374._8_4_ = 0x3e4cceac;
                          auVar1374._0_8_ = 0x3e4cceac3e4cceac;
                          auVar1374._12_4_ = 0x3e4cceac;
                          auVar1374._16_4_ = 0x3e4cceac;
                          auVar1374._20_4_ = 0x3e4cceac;
                          auVar1374._24_4_ = 0x3e4cceac;
                          auVar1374._28_4_ = 0x3e4cceac;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1374);
                          auVar1375._8_4_ = 0xbe7ffffc;
                          auVar1375._0_8_ = 0xbe7ffffcbe7ffffc;
                          auVar1375._12_4_ = 0xbe7ffffc;
                          auVar1375._16_4_ = 0xbe7ffffc;
                          auVar1375._20_4_ = 0xbe7ffffc;
                          auVar1375._24_4_ = 0xbe7ffffc;
                          auVar1375._28_4_ = 0xbe7ffffc;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1375);
                          auVar1376._8_4_ = 0x3eaaaaaa;
                          auVar1376._0_8_ = 0x3eaaaaaa3eaaaaaa;
                          auVar1376._12_4_ = 0x3eaaaaaa;
                          auVar1376._16_4_ = 0x3eaaaaaa;
                          auVar1376._20_4_ = 0x3eaaaaaa;
                          auVar1376._24_4_ = 0x3eaaaaaa;
                          auVar1376._28_4_ = 0x3eaaaaaa;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar1055,auVar1376);
                          auVar1300._0_4_ = auVar1127._0_4_ * auVar1055._0_4_ * auVar268._0_4_;
                          auVar1300._4_4_ = auVar1127._4_4_ * auVar1055._4_4_ * auVar268._4_4_;
                          auVar1300._8_4_ = auVar1127._8_4_ * auVar1055._8_4_ * auVar268._8_4_;
                          auVar1300._12_4_ = auVar1127._12_4_ * auVar1055._12_4_ * auVar268._12_4_;
                          auVar1300._16_4_ = auVar1127._16_4_ * auVar1055._16_4_ * 0.0;
                          auVar1300._20_4_ = auVar1127._20_4_ * auVar1055._20_4_ * 0.0;
                          auVar1300._24_4_ = auVar1127._24_4_ * auVar1055._24_4_ * 0.0;
                          auVar1300._28_4_ = 0;
                          auVar304 = vcvtdq2ps_avx(auVar606);
                          auVar268 = vfmadd231ps_fma(auVar1300,auVar304,auVar1215);
                          auVar268 = vfmsub231ps_fma(ZEXT1632(auVar268),auVar594,auVar1127);
                          auVar593 = vcmpps_avx(ZEXT1632(auVar945),_DAT_00536b00,2);
                          auVar595 = vsubps_avx(ZEXT1632(auVar268),auVar1055);
                          auVar268 = vfmsub231ps_fma(auVar595,auVar743,auVar304);
                          auVar1301._8_4_ = 0xc0000000;
                          auVar1301._0_8_ = 0xc0000000c0000000;
                          auVar1301._12_4_ = 0xc0000000;
                          auVar1301._16_4_ = 0xc0000000;
                          auVar1301._20_4_ = 0xc0000000;
                          auVar1301._24_4_ = 0xc0000000;
                          auVar1301._28_4_ = 0xc0000000;
                          auVar21._4_4_ = auVar268._4_4_ * -2.0;
                          auVar21._0_4_ = auVar268._0_4_ * -2.0;
                          auVar21._8_4_ = auVar268._8_4_ * -2.0;
                          auVar21._12_4_ = auVar268._12_4_ * -2.0;
                          auVar21._16_4_ = 0x80000000;
                          auVar21._20_4_ = 0x80000000;
                          auVar21._24_4_ = 0x80000000;
                          auVar21._28_4_ = auVar304._28_4_;
                          auVar1056._8_4_ = 0x7fffffff;
                          auVar1056._0_8_ = 0x7fffffff7fffffff;
                          auVar1056._12_4_ = 0x7fffffff;
                          auVar1056._16_4_ = 0x7fffffff;
                          auVar1056._20_4_ = 0x7fffffff;
                          auVar1056._24_4_ = 0x7fffffff;
                          auVar1056._28_4_ = 0x7fffffff;
                          auVar593 = vblendvps_avx(auVar21,auVar1056,auVar593);
                          auVar593 = vminps_avx(auVar1449,auVar593);
                          auVar304 = vmaxps_avx(auVar1485,auVar593);
                          auVar607._8_4_ = 0x3fb8aa3b;
                          auVar607._0_8_ = 0x3fb8aa3b3fb8aa3b;
                          auVar607._12_4_ = 0x3fb8aa3b;
                          auVar607._16_4_ = 0x3fb8aa3b;
                          auVar607._20_4_ = 0x3fb8aa3b;
                          auVar607._24_4_ = 0x3fb8aa3b;
                          auVar607._28_4_ = 0x3fb8aa3b;
                          auVar268 = vfmadd213ps_fma(auVar607,auVar304,auVar594);
                          auVar595 = vroundps_avx(ZEXT1632(auVar268),1);
                          auVar593 = vcmpps_avx(ZEXT1632(auVar268),auVar595,1);
                          auVar593 = vandps_avx(auVar593,auVar376);
                          auVar593 = vsubps_avx(auVar595,auVar593);
                          auVar268 = vfmsub231ps_fma(auVar304,auVar593,auVar743);
                          auVar1130 = ZEXT3264(auVar594);
                          auVar1060 = ZEXT864(0) << 0x20;
                          auVar310 = vfnmsub231ps_fma(ZEXT1632(auVar268),auVar593,auVar1215);
                          auVar304 = ZEXT1632(auVar310);
                          auVar22._28_4_ = auVar595._28_4_;
                          auVar22._0_28_ =
                               ZEXT1628(CONCAT412(auVar310._12_4_ * auVar310._12_4_,
                                                  CONCAT48(auVar310._8_4_ * auVar310._8_4_,
                                                           CONCAT44(auVar310._4_4_ * auVar310._4_4_,
                                                                    auVar310._0_4_ * auVar310._0_4_)
                                                          )));
                          auVar1000._8_4_ = 0x3ab743ce;
                          auVar1000._0_8_ = 0x3ab743ce3ab743ce;
                          auVar1000._12_4_ = 0x3ab743ce;
                          auVar1000._16_4_ = 0x3ab743ce;
                          auVar1000._20_4_ = 0x3ab743ce;
                          auVar1000._24_4_ = 0x3ab743ce;
                          auVar1000._28_4_ = 0x3ab743ce;
                          auVar268 = vfmadd213ps_fma(auVar999,auVar304,auVar1000);
                          auVar1001._8_4_ = 0x3c088908;
                          auVar1001._0_8_ = 0x3c0889083c088908;
                          auVar1001._12_4_ = 0x3c088908;
                          auVar1001._16_4_ = 0x3c088908;
                          auVar1001._20_4_ = 0x3c088908;
                          auVar1001._24_4_ = 0x3c088908;
                          auVar1001._28_4_ = 0x3c088908;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1001);
                          auVar1002._8_4_ = 0x3d2aa9c1;
                          auVar1002._0_8_ = 0x3d2aa9c13d2aa9c1;
                          auVar1002._12_4_ = 0x3d2aa9c1;
                          auVar1002._16_4_ = 0x3d2aa9c1;
                          auVar1002._20_4_ = 0x3d2aa9c1;
                          auVar1002._24_4_ = 0x3d2aa9c1;
                          auVar1002._28_4_ = 0x3d2aa9c1;
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1002);
                          auVar1003._8_4_ = 0x3e2aaaaa;
                          auVar1003._0_8_ = 0x3e2aaaaa3e2aaaaa;
                          auVar1003._12_4_ = 0x3e2aaaaa;
                          auVar1003._16_4_ = 0x3e2aaaaa;
                          auVar1003._20_4_ = 0x3e2aaaaa;
                          auVar1003._24_4_ = 0x3e2aaaaa;
                          auVar1003._28_4_ = 0x3e2aaaaa;
                          auVar304 = ZEXT1632(auVar310);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar1003);
                          auVar268 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar304,auVar594);
                          auVar945 = vfmadd213ps_fma(ZEXT1632(auVar268),auVar22,auVar304);
                          auVar413._0_4_ = (int)auVar593._0_4_;
                          auVar413._4_4_ = (int)auVar593._4_4_;
                          auVar413._8_4_ = (int)auVar593._8_4_;
                          auVar413._12_4_ = (int)auVar593._12_4_;
                          auVar493._16_4_ = (int)auVar593._16_4_;
                          auVar493._0_16_ = auVar413;
                          auVar493._20_4_ = (int)auVar593._20_4_;
                          auVar493._24_4_ = (int)auVar593._24_4_;
                          auVar493._28_4_ = (int)auVar593._28_4_;
                          auVar310 = vpslld_avx(auVar413,0x17);
                          auVar268 = vpslld_avx(auVar493._16_16_,0x17);
                          auVar268 = vpaddd_avx(auVar1259,auVar268);
                          auVar310 = vpaddd_avx(auVar1259,auVar310);
                          auVar494._16_16_ = auVar268;
                          auVar494._0_16_ = auVar310;
                          auVar608._0_4_ = auVar945._0_4_ + 1.0;
                          auVar608._4_4_ = auVar945._4_4_ + 1.0;
                          auVar608._8_4_ = auVar945._8_4_ + 1.0;
                          auVar608._12_4_ = auVar945._12_4_ + 1.0;
                          auVar608._16_4_ = 0x3f800000;
                          auVar608._20_4_ = 0x3f800000;
                          auVar608._24_4_ = 0x3f800000;
                          auVar608._28_4_ = 0x3f800000;
                          auVar268 = vfmadd213ps_fma(auVar494,auVar608,auVar376);
                          auVar593 = vdivps_avx(auVar376,ZEXT1632(auVar268));
                          auVar268 = vfnmadd213ps_fma(auVar593,auVar1301,auVar858);
                          auVar1218 = ZEXT1664(auVar268);
                          goto LAB_001c3de9;
                        case 6:
                          puVar254 = (undefined4 *)(this->super_Convolution).activation_params.data;
                          uVar211 = *puVar254;
                          auVar500._4_4_ = uVar211;
                          auVar500._0_4_ = uVar211;
                          auVar500._8_4_ = uVar211;
                          auVar500._12_4_ = uVar211;
                          auVar500._16_4_ = uVar211;
                          auVar500._20_4_ = uVar211;
                          auVar500._24_4_ = uVar211;
                          auVar500._28_4_ = uVar211;
                          uVar211 = puVar254[1];
                          auVar612._4_4_ = uVar211;
                          auVar612._0_4_ = uVar211;
                          auVar612._8_4_ = uVar211;
                          auVar612._12_4_ = uVar211;
                          auVar612._16_4_ = uVar211;
                          auVar612._20_4_ = uVar211;
                          auVar612._24_4_ = uVar211;
                          auVar612._28_4_ = uVar211;
                          auVar268 = vfmadd231ps_fma(auVar612,auVar390,auVar500);
                          auVar593 = vmaxps_avx(ZEXT1632(auVar268),auVar304);
                          auVar593 = vminps_avx(auVar593,auVar376);
                          auVar1218 = ZEXT3264(auVar593);
LAB_001c3de9:
                          auVar1305._0_4_ = auVar1218._0_4_ * fVar248;
                          auVar1305._4_4_ = auVar1218._4_4_ * fVar220;
                          auVar1305._8_4_ = auVar1218._8_4_ * auVar390._8_4_;
                          auVar1305._12_4_ = auVar1218._12_4_ * auVar390._12_4_;
                          auVar1305._16_4_ = auVar1218._16_4_ * auVar390._16_4_;
                          auVar1305._20_4_ = auVar1218._20_4_ * auVar390._20_4_;
                          auVar1305._28_36_ = auVar1218._28_36_;
                          auVar1305._24_4_ = auVar1218._24_4_ * auVar390._24_4_;
                          auVar593 = auVar1305._0_32_;
                        }
switchD_001c39cd_caseD_1:
                        auVar310 = auVar593._16_16_;
                        auVar268 = auVar593._0_16_;
                        if (iVar207 == 1) {
                          *(int *)*local_b88 = auVar593._0_4_;
                          uVar211 = vextractps_avx(auVar268,1);
                          *(undefined4 *)((long)*local_b88 + lVar200 * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar268,2);
                          *(undefined4 *)((long)*local_b88 + local_6f0._0_8_ * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar268,3);
                          *(undefined4 *)((long)*local_b88 + (long)local_8d8 * 4) = uVar211;
                          *(int *)((long)*local_b88 + (long)(iVar187 * 4) * 4) = auVar593._16_4_;
                          uVar211 = vextractps_avx(auVar310,1);
                          *(undefined4 *)((long)*local_b88 + (long)(iVar187 * 5) * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar310,2);
                          *(undefined4 *)((long)*local_b88 + (long)(iVar187 * 6) * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar310,3);
                          *(undefined4 *)((long)*local_b88 + (long)(iVar187 * 7) * 4) = uVar211;
                          local_b88 = (undefined1 (*) [32])((long)*local_b88 + 4);
                        }
                        else if (iVar207 == 4) {
                          *(undefined1 (*) [16])*local_b88 = auVar268;
                          *(undefined1 (*) [16])((long)*local_b88 + lVar200 * 4) = auVar310;
                          local_b88 = (undefined1 (*) [32])((long)*local_b88 + 0x10);
                        }
                        else if (iVar207 == 8) {
                          *local_b88 = auVar593;
                          local_b88 = local_b88 + 1;
                        }
                      }
                    }
                    _local_9c0 = auVar613;
                  }
                  uVar209 = (long)(iVar257 + iVar258 * -8) / 4;
                  local_9c0._0_8_ = uVar196 * 0x10;
                  iVar207 = (int)uVar209;
                  local_850 = (void *)0x0;
                  if (0 < iVar207) {
                    local_850 = (void *)(uVar209 & 0xffffffff);
                  }
                  auVar1060 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar1130 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000))
                                      );
                  auVar1071._8_4_ = 0xc2b0c0a5;
                  auVar1071._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar1071._12_4_ = 0xc2b0c0a5;
                  auVar880._8_4_ = 0xb95e8083;
                  auVar880._0_8_ = 0xb95e8083b95e8083;
                  auVar880._12_4_ = 0xb95e8083;
                  auVar1131._8_4_ = 0x3ab743ce;
                  auVar1131._0_8_ = 0x3ab743ce3ab743ce;
                  auVar1131._12_4_ = 0x3ab743ce;
                  pvVar204 = (void *)0x0;
                  local_9c8 = (void *)(long)(iVar187 * 5);
                  while (pvVar251 = pvVar204, pvVar251 != local_850) {
                    uVar209 = (long)(iVar258 * 8) + (long)pvVar251 * 4;
                    iVar187 = top_blob->elempack;
                    uVar259 = (int)uVar209 >> 0x1f;
                    local_b88 = (undefined1 (*) [32])
                                ((long)(int)((long)((ulong)uVar259 << 0x20 | uVar209 & 0xffffffff) /
                                            (long)iVar187) * top_blob->cstep * top_blob->elemsize +
                                (long)top_blob->data);
                    uVar229 = (ulong)uVar259 << 0x20 | uVar209 & 0xffffffff;
                    lVar256 = (long)local_920.c * (long)local_920.elempack;
                    uVar259 = top_blob->w;
                    if (top_blob->w < 1) {
                      uVar259 = 0;
                    }
                    uVar247 = top_blob->h;
                    if (top_blob->h < 1) {
                      uVar247 = 0;
                    }
                    for (uVar242 = 0; uVar242 != uVar247; uVar242 = uVar242 + 1) {
                      for (uVar237 = 0; uVar237 != uVar259; uVar237 = uVar237 + 1) {
                        auVar1218 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar268 = ZEXT816(0) << 0x40;
                        if ((void *)local_7c0._0_8_ != (void *)0x0) {
                          auVar268 = *(undefined1 (*) [16])(local_7c0._0_8_ + uVar209 * 4);
                        }
                        auVar1305 = ZEXT1664(auVar268);
                        pauVar226 = (undefined1 (*) [16])
                                    ((this->weight_data_tm).cstep *
                                     (long)(((int)((long)uVar229 % 8) >> 2) +
                                           (int)((long)uVar229 / 8)) *
                                     (this->weight_data_tm).elemsize +
                                    (long)(this->weight_data_tm).data);
                        local_840._0_4_ = (uint)uVar237;
                        lVar215 = local_920.cstep * local_920.elemsize;
                        lVar216 = (long)local_920.w * uVar242 * local_818 * local_920.elemsize;
                        lVar201 = (long)local_920.data +
                                  (long)(int)(local_920.elempack * iVar249 * (uint)local_840) * 4 +
                                  lVar216;
                        local_960._0_8_ = lVar201;
                        uVar232 = 0;
                        auVar1379 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar1452 = ZEXT1664(ZEXT816(0) << 0x40);
                        while( true ) {
                          if ((int)lVar256 <= (int)((uint)uVar232 | 7)) break;
                          lVar202 = (int)((long)((ulong)(uint)((int)(uint)uVar232 >> 0x1f) << 0x20 |
                                                uVar232 & 0xffffffff) / (long)local_920.elempack) *
                                    lVar215;
                          if (local_920.elempack == 8) {
                            pauVar238 = pauVar226;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar217 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202);
                              auVar1489._4_4_ = uVar211;
                              auVar1489._0_4_ = uVar211;
                              auVar1489._8_4_ = uVar211;
                              auVar1489._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1489,auVar1305._0_16_,*pauVar238);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 4);
                              auVar1219._4_4_ = uVar211;
                              auVar1219._0_4_ = uVar211;
                              auVar1219._8_4_ = uVar211;
                              auVar1219._12_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar1219,auVar1452._0_16_,pauVar238[1]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 8);
                              auVar770._4_4_ = uVar211;
                              auVar770._0_4_ = uVar211;
                              auVar770._8_4_ = uVar211;
                              auVar770._12_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar770,auVar1379._0_16_,pauVar238[2]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0xc);
                              auVar940._4_4_ = uVar211;
                              auVar940._0_4_ = uVar211;
                              auVar940._8_4_ = uVar211;
                              auVar940._12_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar940,auVar1218._0_16_,pauVar238[3]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0x10);
                              auVar1306._4_4_ = uVar211;
                              auVar1306._0_4_ = uVar211;
                              auVar1306._8_4_ = uVar211;
                              auVar1306._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1306,auVar268,pauVar238[4]);
                              auVar1305 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0x14);
                              auVar1453._4_4_ = uVar211;
                              auVar1453._0_4_ = uVar211;
                              auVar1453._8_4_ = uVar211;
                              auVar1453._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1453,auVar310,pauVar238[5]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0x18);
                              auVar1392._4_4_ = uVar211;
                              auVar1392._0_4_ = uVar211;
                              auVar1392._8_4_ = uVar211;
                              auVar1392._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1392,auVar945,pauVar238[6]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0x1c);
                              auVar655._4_4_ = uVar211;
                              auVar655._0_4_ = uVar211;
                              auVar655._8_4_ = uVar211;
                              auVar655._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar655,auVar309,pauVar238[7]);
                              auVar1218 = ZEXT1664(auVar268);
                              pauVar238 = pauVar238 + 8;
                            }
                            pauVar226 = pauVar226 + uVar196 * 8;
                          }
                          if (local_920.elempack == 4) {
                            lVar217 = lVar208 * 4 + lVar202;
                            pauVar238 = pauVar226;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar203 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar202);
                              auVar771._4_4_ = uVar211;
                              auVar771._0_4_ = uVar211;
                              auVar771._8_4_ = uVar211;
                              auVar771._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar771,auVar1305._0_16_,*pauVar238);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar202 + 4);
                              auVar941._4_4_ = uVar211;
                              auVar941._0_4_ = uVar211;
                              auVar941._8_4_ = uVar211;
                              auVar941._12_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar941,auVar1452._0_16_,pauVar238[1]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar202 + 8);
                              auVar1220._4_4_ = uVar211;
                              auVar1220._0_4_ = uVar211;
                              auVar1220._8_4_ = uVar211;
                              auVar1220._12_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar1220,auVar1379._0_16_,pauVar238[2]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar202 + 0xc);
                              auVar1490._4_4_ = uVar211;
                              auVar1490._0_4_ = uVar211;
                              auVar1490._8_4_ = uVar211;
                              auVar1490._12_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar1490,auVar1218._0_16_,pauVar238[3]);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar217);
                              auVar1307._4_4_ = uVar211;
                              auVar1307._0_4_ = uVar211;
                              auVar1307._8_4_ = uVar211;
                              auVar1307._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1307,auVar268,pauVar238[4]);
                              auVar1305 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar217 + 4);
                              auVar1454._4_4_ = uVar211;
                              auVar1454._0_4_ = uVar211;
                              auVar1454._8_4_ = uVar211;
                              auVar1454._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1454,auVar310,pauVar238[5]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar217 + 8);
                              auVar1393._4_4_ = uVar211;
                              auVar1393._0_4_ = uVar211;
                              auVar1393._8_4_ = uVar211;
                              auVar1393._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1393,auVar945,pauVar238[6]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar203 * 4 + lVar217 + 0xc);
                              auVar656._4_4_ = uVar211;
                              auVar656._0_4_ = uVar211;
                              auVar656._8_4_ = uVar211;
                              auVar656._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar656,auVar309,pauVar238[7]);
                              auVar1218 = ZEXT1664(auVar268);
                              pauVar238 = pauVar238 + 8;
                            }
                            pauVar226 = pauVar226 + uVar196 * 8;
                          }
                          if (local_920.elempack == 1) {
                            pauVar238 = pauVar226;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              iVar193 = *(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar201 + (long)iVar193 * 4 + lVar202);
                              auVar772._4_4_ = uVar211;
                              auVar772._0_4_ = uVar211;
                              auVar772._8_4_ = uVar211;
                              auVar772._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar772,auVar1305._0_16_,*pauVar238);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(local_b80 + iVar193) * 4 + lVar202);
                              auVar942._4_4_ = uVar211;
                              auVar942._0_4_ = uVar211;
                              auVar942._8_4_ = uVar211;
                              auVar942._12_4_ = uVar211;
                              auVar310 = vfmadd132ps_fma(auVar942,auVar1452._0_16_,pauVar238[1]);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar193 + iVar190) * 4 + lVar202);
                              auVar1221._4_4_ = uVar211;
                              auVar1221._0_4_ = uVar211;
                              auVar1221._8_4_ = uVar211;
                              auVar1221._12_4_ = uVar211;
                              auVar945 = vfmadd132ps_fma(auVar1221,auVar1379._0_16_,pauVar238[2]);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar193 + iVar192) * 4 + lVar202);
                              auVar1491._4_4_ = uVar211;
                              auVar1491._0_4_ = uVar211;
                              auVar1491._8_4_ = uVar211;
                              auVar1491._12_4_ = uVar211;
                              auVar309 = vfmadd132ps_fma(auVar1491,auVar1218._0_16_,pauVar238[3]);
                              uVar211 = *(undefined4 *)
                                         (lVar201 +
                                         (long)(iVar193 + (int)(float)local_a40) * 4 + lVar202);
                              auVar1308._4_4_ = uVar211;
                              auVar1308._0_4_ = uVar211;
                              auVar1308._8_4_ = uVar211;
                              auVar1308._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1308,auVar268,pauVar238[4]);
                              auVar1305 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 +
                                         (long)(iVar193 + (int)(float)local_a60) * 4 + lVar202);
                              auVar1455._4_4_ = uVar211;
                              auVar1455._0_4_ = uVar211;
                              auVar1455._8_4_ = uVar211;
                              auVar1455._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1455,auVar310,pauVar238[5]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar188 + iVar193) * 4 + lVar202);
                              auVar1394._4_4_ = uVar211;
                              auVar1394._0_4_ = uVar211;
                              auVar1394._8_4_ = uVar211;
                              auVar1394._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar1394,auVar945,pauVar238[6]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar193 + iVar239) * 4 + lVar202);
                              auVar657._4_4_ = uVar211;
                              auVar657._0_4_ = uVar211;
                              auVar657._8_4_ = uVar211;
                              auVar657._12_4_ = uVar211;
                              auVar268 = vfmadd132ps_fma(auVar657,auVar309,pauVar238[7]);
                              auVar1218 = ZEXT1664(auVar268);
                              pauVar238 = pauVar238 + 8;
                            }
                            pauVar226 = pauVar226 + uVar196 * 8;
                          }
                          uVar232 = uVar232 + 8;
                        }
                        for (; (int)((uint)uVar232 | 3) < (int)lVar256; uVar232 = uVar232 + 4) {
                          lVar202 = (int)((long)((ulong)(uint)((int)(uint)uVar232 >> 0x1f) << 0x20 |
                                                uVar232 & 0xffffffff) / (long)local_920.elempack) *
                                    lVar215;
                          if (local_920.elempack == 4) {
                            pauVar238 = pauVar226;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              lVar217 = (long)*(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202);
                              auVar773._4_4_ = uVar211;
                              auVar773._0_4_ = uVar211;
                              auVar773._8_4_ = uVar211;
                              auVar773._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1305._0_16_,auVar773,*pauVar238);
                              auVar1305 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 4);
                              auVar774._4_4_ = uVar211;
                              auVar774._0_4_ = uVar211;
                              auVar774._8_4_ = uVar211;
                              auVar774._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1452._0_16_,auVar774,pauVar238[1]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 8);
                              auVar775._4_4_ = uVar211;
                              auVar775._0_4_ = uVar211;
                              auVar775._8_4_ = uVar211;
                              auVar775._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1379._0_16_,auVar775,pauVar238[2]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)(lVar201 + lVar217 * 4 + lVar202 + 0xc);
                              auVar776._4_4_ = uVar211;
                              auVar776._0_4_ = uVar211;
                              auVar776._8_4_ = uVar211;
                              auVar776._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1218._0_16_,auVar776,pauVar238[3]);
                              auVar1218 = ZEXT1664(auVar268);
                              pauVar238 = pauVar238 + 4;
                            }
                            pauVar226 = pauVar226 + uVar196 * 4;
                          }
                          if (local_920.elempack == 1) {
                            pauVar238 = pauVar226;
                            for (uVar213 = 0; uVar196 != uVar213; uVar213 = uVar213 + 1) {
                              iVar193 = *(int *)((long)local_660 + uVar213 * 4);
                              uVar211 = *(undefined4 *)(lVar201 + (long)iVar193 * 4 + lVar202);
                              auVar777._4_4_ = uVar211;
                              auVar777._0_4_ = uVar211;
                              auVar777._8_4_ = uVar211;
                              auVar777._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1305._0_16_,auVar777,*pauVar238);
                              auVar1305 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(local_b80 + iVar193) * 4 + lVar202);
                              auVar778._4_4_ = uVar211;
                              auVar778._0_4_ = uVar211;
                              auVar778._8_4_ = uVar211;
                              auVar778._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1452._0_16_,auVar778,pauVar238[1]);
                              auVar1452 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar190 + iVar193) * 4 + lVar202);
                              auVar779._4_4_ = uVar211;
                              auVar779._0_4_ = uVar211;
                              auVar779._8_4_ = uVar211;
                              auVar779._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1379._0_16_,auVar779,pauVar238[2]);
                              auVar1379 = ZEXT1664(auVar268);
                              uVar211 = *(undefined4 *)
                                         (lVar201 + (long)(iVar193 + iVar192) * 4 + lVar202);
                              auVar780._4_4_ = uVar211;
                              auVar780._0_4_ = uVar211;
                              auVar780._8_4_ = uVar211;
                              auVar780._12_4_ = uVar211;
                              auVar268 = vfmadd231ps_fma(auVar1218._0_16_,auVar780,pauVar238[3]);
                              auVar1218 = ZEXT1664(auVar268);
                              pauVar238 = pauVar238 + 4;
                            }
                            pauVar226 = pauVar226 + uVar196 * 4;
                          }
                        }
                        lVar216 = uVar237 * (long)iVar249 * 4 + lVar216;
                        for (; (long)(uVar232 | 1) < lVar256; uVar232 = uVar232 + 2) {
                          lVar201 = uVar232 * lVar215 + lVar216;
                          for (lVar202 = 0; lVar234 - lVar202 != 0; lVar202 = lVar202 + 4) {
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (long)*(int *)((long)local_660 + lVar202) * 4 + lVar201);
                            auVar781._4_4_ = uVar211;
                            auVar781._0_4_ = uVar211;
                            auVar781._8_4_ = uVar211;
                            auVar781._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1305._0_16_,auVar781,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar226 + lVar202 * 8));
                            auVar1305 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (*(int *)((long)local_660 + lVar202) + lVar208) * 4 + lVar201
                                       );
                            auVar782._4_4_ = uVar211;
                            auVar782._0_4_ = uVar211;
                            auVar782._8_4_ = uVar211;
                            auVar782._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1452._0_16_,auVar782,
                                                       *(undefined1 (*) [16])
                                                        (pauVar226[1] + lVar202 * 8));
                            auVar1452 = ZEXT1664(auVar268);
                          }
                          pauVar226 = pauVar226 + uVar196 * 2;
                        }
                        for (; (long)uVar232 < lVar256; uVar232 = uVar232 + 1) {
                          for (lVar201 = 0; lVar234 - lVar201 != 0; lVar201 = lVar201 + 4) {
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (long)*(int *)((long)local_660 + lVar201) * 4 +
                                       uVar232 * lVar215 + lVar216);
                            auVar783._4_4_ = uVar211;
                            auVar783._0_4_ = uVar211;
                            auVar783._8_4_ = uVar211;
                            auVar783._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1305._0_16_,auVar783,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar226 + lVar201 * 4));
                            auVar1305 = ZEXT1664(auVar268);
                          }
                          pauVar226 = pauVar226 + uVar196;
                        }
                        auVar658._0_4_ =
                             auVar1379._0_4_ + auVar1218._0_4_ + auVar1452._0_4_ + auVar1305._0_4_;
                        auVar658._4_4_ =
                             auVar1379._4_4_ + auVar1218._4_4_ + auVar1452._4_4_ + auVar1305._4_4_;
                        auVar658._8_4_ =
                             auVar1379._8_4_ + auVar1218._8_4_ + auVar1452._8_4_ + auVar1305._8_4_;
                        auVar658._12_4_ =
                             auVar1379._12_4_ + auVar1218._12_4_ +
                             auVar1452._12_4_ + auVar1305._12_4_;
                        auVar1310 = auVar658;
                        if (local_760 - 1U < 6) {
                          auVar268 = auVar1060._0_16_;
                          auVar1310 = vmaxps_avx(auVar658,auVar268);
                          auVar310 = auVar1130._0_16_;
                          switch(local_760) {
                          case 2:
                            auVar268 = vminps_avx(auVar658,auVar268);
                            uVar211 = *(this->super_Convolution).activation_params.data;
                            auVar784._4_4_ = uVar211;
                            auVar784._0_4_ = uVar211;
                            auVar784._8_4_ = uVar211;
                            auVar784._12_4_ = uVar211;
                            auVar1310 = vfmadd231ps_fma(auVar1310,auVar268,auVar784);
                            break;
                          case 3:
                            puVar254 = (undefined4 *)
                                       (this->super_Convolution).activation_params.data;
                            uVar211 = *puVar254;
                            auVar790._4_4_ = uVar211;
                            auVar790._0_4_ = uVar211;
                            auVar790._8_4_ = uVar211;
                            auVar790._12_4_ = uVar211;
                            uVar211 = puVar254[1];
                            auVar949._4_4_ = uVar211;
                            auVar949._0_4_ = uVar211;
                            auVar949._8_4_ = uVar211;
                            auVar949._12_4_ = uVar211;
                            auVar268 = vmaxps_avx(auVar658,auVar790);
                            auVar1310 = vminps_avx(auVar268,auVar949);
                            break;
                          case 4:
                            uVar232 = CONCAT44(auVar658._4_4_,auVar658._0_4_);
                            auVar659._0_8_ = uVar232 ^ 0x8000000080000000;
                            auVar659._8_4_ = -auVar658._8_4_;
                            auVar659._12_4_ = -auVar658._12_4_;
                            auVar791._8_4_ = 0x42b0c0a5;
                            auVar791._0_8_ = 0x42b0c0a542b0c0a5;
                            auVar791._12_4_ = 0x42b0c0a5;
                            auVar268 = vminps_avx(auVar659,auVar791);
                            auVar792._8_4_ = 0xc2b0c0a5;
                            auVar792._0_8_ = 0xc2b0c0a5c2b0c0a5;
                            auVar792._12_4_ = 0xc2b0c0a5;
                            auVar309 = vmaxps_avx(auVar268,auVar792);
                            auVar793._8_4_ = 0x3fb8aa3b;
                            auVar793._0_8_ = 0x3fb8aa3b3fb8aa3b;
                            auVar793._12_4_ = 0x3fb8aa3b;
                            auVar268 = vfmadd213ps_fma(auVar793,auVar309,auVar310);
                            auVar950._0_4_ = (int)auVar268._0_4_;
                            auVar950._4_4_ = (int)auVar268._4_4_;
                            auVar950._8_4_ = (int)auVar268._8_4_;
                            auVar950._12_4_ = (int)auVar268._12_4_;
                            auVar945 = vcvtdq2ps_avx(auVar950);
                            auVar268 = vcmpps_avx(auVar268,auVar945,1);
                            auVar1309._8_4_ = 0x3f800000;
                            auVar1309._0_8_ = 0x3f8000003f800000;
                            auVar1309._12_4_ = 0x3f800000;
                            auVar268 = vandps_avx(auVar1309,auVar268);
                            auVar268 = vsubps_avx(auVar945,auVar268);
                            auVar322._8_4_ = 0x3f318000;
                            auVar322._0_8_ = 0x3f3180003f318000;
                            auVar322._12_4_ = 0x3f318000;
                            auVar945 = vfmsub231ps_fma(auVar309,auVar268,auVar322);
                            auVar951._8_4_ = 0x395e8083;
                            auVar951._0_8_ = 0x395e8083395e8083;
                            auVar951._12_4_ = 0x395e8083;
                            auVar309 = vfmsub231ps_fma(auVar945,auVar268,auVar951);
                            auVar952._0_4_ = auVar309._0_4_ * auVar309._0_4_;
                            auVar952._4_4_ = auVar309._4_4_ * auVar309._4_4_;
                            auVar952._8_4_ = auVar309._8_4_ * auVar309._8_4_;
                            auVar952._12_4_ = auVar309._12_4_ * auVar309._12_4_;
                            auVar1230._8_4_ = 0x39506967;
                            auVar1230._0_8_ = 0x3950696739506967;
                            auVar1230._12_4_ = 0x39506967;
                            auVar1010._8_4_ = 0x3ab743ce;
                            auVar1010._0_8_ = 0x3ab743ce3ab743ce;
                            auVar1010._12_4_ = 0x3ab743ce;
                            auVar945 = vfmadd213ps_fma(auVar1230,auVar309,auVar1010);
                            auVar323._8_4_ = 0x3c088908;
                            auVar323._0_8_ = 0x3c0889083c088908;
                            auVar323._12_4_ = 0x3c088908;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar323);
                            auVar324._8_4_ = 0x3d2aa9c1;
                            auVar324._0_8_ = 0x3d2aa9c13d2aa9c1;
                            auVar324._12_4_ = 0x3d2aa9c1;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar324);
                            auVar325._8_4_ = 0x3e2aaaaa;
                            auVar325._0_8_ = 0x3e2aaaaa3e2aaaaa;
                            auVar325._12_4_ = 0x3e2aaaaa;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar325);
                            auVar310 = vfmadd213ps_fma(auVar945,auVar309,auVar310);
                            auVar310 = vfmadd213ps_fma(auVar310,auVar952,auVar309);
                            auVar660._0_4_ = auVar310._0_4_ + 1.0;
                            auVar660._4_4_ = auVar310._4_4_ + 1.0;
                            auVar660._8_4_ = auVar310._8_4_ + 1.0;
                            auVar660._12_4_ = auVar310._12_4_ + 1.0;
                            auVar794._0_4_ = (int)auVar268._0_4_;
                            auVar794._4_4_ = (int)auVar268._4_4_;
                            auVar794._8_4_ = (int)auVar268._8_4_;
                            auVar794._12_4_ = (int)auVar268._12_4_;
                            auVar268 = vpslld_avx(auVar794,0x17);
                            auVar268 = vpaddd_avx(auVar1309,auVar268);
                            auVar268 = vfmadd213ps_fma(auVar268,auVar660,auVar1309);
                            auVar1310 = vdivps_avx(auVar1309,auVar268);
                            break;
                          case 5:
                            auVar1009._8_4_ = 0x42b0c0a5;
                            auVar1009._0_8_ = 0x42b0c0a542b0c0a5;
                            auVar1009._12_4_ = 0x42b0c0a5;
                            auVar268 = vminps_avx(auVar1009,auVar658);
                            auVar309 = vmaxps_avx(auVar1071,auVar268);
                            auVar943._8_4_ = 0x3fb8aa3b;
                            auVar943._0_8_ = 0x3fb8aa3b3fb8aa3b;
                            auVar943._12_4_ = 0x3fb8aa3b;
                            auVar268 = vfmadd213ps_fma(auVar943,auVar309,auVar310);
                            auVar1222._0_4_ = (int)auVar268._0_4_;
                            auVar1222._4_4_ = (int)auVar268._4_4_;
                            auVar1222._8_4_ = (int)auVar268._8_4_;
                            auVar1222._12_4_ = (int)auVar268._12_4_;
                            auVar945 = vcvtdq2ps_avx(auVar1222);
                            auVar268 = vcmpps_avx(auVar268,auVar945,1);
                            auVar1492._8_4_ = 0x3f800000;
                            auVar1492._0_8_ = 0x3f8000003f800000;
                            auVar1492._12_4_ = 0x3f800000;
                            auVar268 = vandps_avx(auVar1492,auVar268);
                            auVar268 = vsubps_avx(auVar945,auVar268);
                            auVar414._8_4_ = 0x3f318000;
                            auVar414._0_8_ = 0x3f3180003f318000;
                            auVar414._12_4_ = 0x3f318000;
                            auVar945 = vfmsub231ps_fma(auVar309,auVar268,auVar414);
                            auVar309 = vfnmsub231ps_fma(auVar945,auVar268,auVar880);
                            auVar1223._0_4_ = auVar309._0_4_ * auVar309._0_4_;
                            auVar1223._4_4_ = auVar309._4_4_ * auVar309._4_4_;
                            auVar1223._8_4_ = auVar309._8_4_ * auVar309._8_4_;
                            auVar1223._12_4_ = auVar309._12_4_ * auVar309._12_4_;
                            auVar524._8_4_ = 0x39506967;
                            auVar524._0_8_ = 0x3950696739506967;
                            auVar524._12_4_ = 0x39506967;
                            auVar945 = vfmadd213ps_fma(auVar524,auVar309,auVar1131);
                            auVar318._8_4_ = 0x3c088908;
                            auVar318._0_8_ = 0x3c0889083c088908;
                            auVar318._12_4_ = 0x3c088908;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar318);
                            auVar1395._8_4_ = 0x3d2aa9c1;
                            auVar1395._0_8_ = 0x3d2aa9c13d2aa9c1;
                            auVar1395._12_4_ = 0x3d2aa9c1;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar1395);
                            auVar1396._8_4_ = 0x3e2aaaaa;
                            auVar1396._0_8_ = 0x3e2aaaaa3e2aaaaa;
                            auVar1396._12_4_ = 0x3e2aaaaa;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar1396);
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar310);
                            auVar945 = vfmadd213ps_fma(auVar945,auVar1223,auVar309);
                            auVar785._0_4_ = auVar945._0_4_ + 1.0;
                            auVar785._4_4_ = auVar945._4_4_ + 1.0;
                            auVar785._8_4_ = auVar945._8_4_ + 1.0;
                            auVar785._12_4_ = auVar945._12_4_ + 1.0;
                            auVar944._0_4_ = (int)auVar268._0_4_;
                            auVar944._4_4_ = (int)auVar268._4_4_;
                            auVar944._8_4_ = (int)auVar268._8_4_;
                            auVar944._12_4_ = (int)auVar268._12_4_;
                            auVar268 = vpslld_avx(auVar944,0x17);
                            auVar268 = vpaddd_avx(auVar1492,auVar268);
                            auVar668 = vfmadd213ps_fma(auVar268,auVar785,auVar1492);
                            auVar786._8_4_ = 0x800000;
                            auVar786._0_8_ = 0x80000000800000;
                            auVar786._12_4_ = 0x800000;
                            auVar268 = vmaxps_avx(auVar668,auVar786);
                            auVar945 = vpsrld_avx(auVar268,0x17);
                            auVar1224._8_4_ = 0xffffff82;
                            auVar1224._0_8_ = 0xffffff82ffffff82;
                            auVar1224._12_4_ = 0xffffff82;
                            auVar945 = vpaddd_avx(auVar1224,auVar945);
                            auVar1225._8_4_ = 0x807fffff;
                            auVar1225._0_8_ = 0x807fffff807fffff;
                            auVar1225._12_4_ = 0x807fffff;
                            auVar268 = vandps_avx(auVar1225,auVar268);
                            auVar534 = vorps_avx(auVar268,auVar310);
                            auVar309 = vcvtdq2ps_avx(auVar945);
                            auVar1226._8_4_ = 0x3f3504f3;
                            auVar1226._0_8_ = 0x3f3504f33f3504f3;
                            auVar1226._12_4_ = 0x3f3504f3;
                            auVar945 = vcmpps_avx(auVar534,auVar1226,1);
                            auVar268 = vandps_avx(auVar945,auVar534);
                            auVar787._0_4_ = auVar268._0_4_ + auVar534._0_4_ + -1.0;
                            auVar787._4_4_ = auVar268._4_4_ + auVar534._4_4_ + -1.0;
                            auVar787._8_4_ = auVar268._8_4_ + auVar534._8_4_ + -1.0;
                            auVar787._12_4_ = auVar268._12_4_ + auVar534._12_4_ + -1.0;
                            auVar268 = vandps_avx(auVar945,auVar1492);
                            auVar945 = vsubps_avx(auVar309,auVar268);
                            auVar1227._0_4_ = auVar787._0_4_ * auVar787._0_4_;
                            auVar1227._4_4_ = auVar787._4_4_ * auVar787._4_4_;
                            auVar1227._8_4_ = auVar787._8_4_ * auVar787._8_4_;
                            auVar1227._12_4_ = auVar787._12_4_ * auVar787._12_4_;
                            auVar1397._8_4_ = 0x3d9021bb;
                            auVar1397._0_8_ = 0x3d9021bb3d9021bb;
                            auVar1397._12_4_ = 0x3d9021bb;
                            auVar1456._8_4_ = 0xbdebd1b8;
                            auVar1456._0_8_ = 0xbdebd1b8bdebd1b8;
                            auVar1456._12_4_ = 0xbdebd1b8;
                            auVar268 = vfmadd213ps_fma(auVar1397,auVar787,auVar1456);
                            auVar1457._8_4_ = 0x3def251a;
                            auVar1457._0_8_ = 0x3def251a3def251a;
                            auVar1457._12_4_ = 0x3def251a;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1457);
                            auVar1458._8_4_ = 0xbdfe5d4f;
                            auVar1458._0_8_ = 0xbdfe5d4fbdfe5d4f;
                            auVar1458._12_4_ = 0xbdfe5d4f;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1458);
                            auVar1459._8_4_ = 0x3e11e9bf;
                            auVar1459._0_8_ = 0x3e11e9bf3e11e9bf;
                            auVar1459._12_4_ = 0x3e11e9bf;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1459);
                            auVar1460._8_4_ = 0xbe2aae50;
                            auVar1460._0_8_ = 0xbe2aae50be2aae50;
                            auVar1460._12_4_ = 0xbe2aae50;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1460);
                            auVar1461._8_4_ = 0x3e4cceac;
                            auVar1461._0_8_ = 0x3e4cceac3e4cceac;
                            auVar1461._12_4_ = 0x3e4cceac;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1461);
                            auVar1462._8_4_ = 0xbe7ffffc;
                            auVar1462._0_8_ = 0xbe7ffffcbe7ffffc;
                            auVar1462._12_4_ = 0xbe7ffffc;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1462);
                            auVar1463._8_4_ = 0x3eaaaaaa;
                            auVar1463._0_8_ = 0x3eaaaaaa3eaaaaaa;
                            auVar1463._12_4_ = 0x3eaaaaaa;
                            auVar268 = vfmadd213ps_fma(auVar268,auVar787,auVar1463);
                            auVar1398._0_4_ = auVar1227._0_4_ * auVar787._0_4_ * auVar268._0_4_;
                            auVar1398._4_4_ = auVar1227._4_4_ * auVar787._4_4_ * auVar268._4_4_;
                            auVar1398._8_4_ = auVar1227._8_4_ * auVar787._8_4_ * auVar268._8_4_;
                            auVar1398._12_4_ = auVar1227._12_4_ * auVar787._12_4_ * auVar268._12_4_;
                            auVar268 = vfmadd231ps_fma(auVar1398,auVar945,auVar880);
                            auVar309 = vfmsub231ps_fma(auVar268,auVar310,auVar1227);
                            auVar268 = vcmpps_avx(auVar668,_DAT_00533020,2);
                            auVar309 = vsubps_avx(auVar309,auVar787);
                            auVar945 = vfnmadd231ps_fma(auVar309,auVar414,auVar945);
                            auVar788._0_4_ = auVar945._0_4_ + auVar945._0_4_;
                            auVar788._4_4_ = auVar945._4_4_ + auVar945._4_4_;
                            auVar788._8_4_ = auVar945._8_4_ + auVar945._8_4_;
                            auVar788._12_4_ = auVar945._12_4_ + auVar945._12_4_;
                            auVar946._8_4_ = 0x7fffffff;
                            auVar946._0_8_ = 0x7fffffff7fffffff;
                            auVar946._12_4_ = 0x7fffffff;
                            auVar268 = vblendvps_avx(auVar788,auVar946,auVar268);
                            auVar268 = vminps_avx(auVar1009,auVar268);
                            auVar309 = vmaxps_avx(auVar1071,auVar268);
                            auVar947._8_4_ = 0x3fb8aa3b;
                            auVar947._0_8_ = 0x3fb8aa3b3fb8aa3b;
                            auVar947._12_4_ = 0x3fb8aa3b;
                            auVar268 = vfmadd213ps_fma(auVar947,auVar309,auVar310);
                            auVar1228._0_4_ = (int)auVar268._0_4_;
                            auVar1228._4_4_ = (int)auVar268._4_4_;
                            auVar1228._8_4_ = (int)auVar268._8_4_;
                            auVar1228._12_4_ = (int)auVar268._12_4_;
                            auVar945 = vcvtdq2ps_avx(auVar1228);
                            auVar268 = vcmpps_avx(auVar268,auVar945,1);
                            auVar268 = vandps_avx(auVar1492,auVar268);
                            auVar268 = vsubps_avx(auVar945,auVar268);
                            auVar945 = vfmsub231ps_fma(auVar309,auVar268,auVar414);
                            auVar1130 = ZEXT1664(auVar310);
                            auVar1060 = ZEXT864(0);
                            auVar309 = vfnmsub231ps_fma(auVar945,auVar268,auVar880);
                            auVar1229._0_4_ = auVar309._0_4_ * auVar309._0_4_;
                            auVar1229._4_4_ = auVar309._4_4_ * auVar309._4_4_;
                            auVar1229._8_4_ = auVar309._8_4_ * auVar309._8_4_;
                            auVar1229._12_4_ = auVar309._12_4_ * auVar309._12_4_;
                            auVar945 = vfmadd213ps_fma(auVar524,auVar309,auVar1131);
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar318);
                            auVar319._8_4_ = 0x3d2aa9c1;
                            auVar319._0_8_ = 0x3d2aa9c13d2aa9c1;
                            auVar319._12_4_ = 0x3d2aa9c1;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar319);
                            auVar320._8_4_ = 0x3e2aaaaa;
                            auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
                            auVar320._12_4_ = 0x3e2aaaaa;
                            auVar945 = vfmadd213ps_fma(auVar945,auVar309,auVar320);
                            auVar310 = vfmadd213ps_fma(auVar945,auVar309,auVar310);
                            auVar310 = vfmadd213ps_fma(auVar310,auVar1229,auVar309);
                            auVar789._0_4_ = auVar310._0_4_ + 1.0;
                            auVar789._4_4_ = auVar310._4_4_ + 1.0;
                            auVar789._8_4_ = auVar310._8_4_ + 1.0;
                            auVar789._12_4_ = auVar310._12_4_ + 1.0;
                            auVar948._0_4_ = (int)auVar268._0_4_;
                            auVar948._4_4_ = (int)auVar268._4_4_;
                            auVar948._8_4_ = (int)auVar268._8_4_;
                            auVar948._12_4_ = (int)auVar268._12_4_;
                            auVar268 = vpslld_avx(auVar948,0x17);
                            auVar268 = vpaddd_avx(auVar1492,auVar268);
                            auVar268 = vfmadd213ps_fma(auVar268,auVar789,auVar1492);
                            auVar321._8_4_ = 0x40000000;
                            auVar321._0_8_ = 0x4000000040000000;
                            auVar321._12_4_ = 0x40000000;
                            auVar268 = vdivps_avx(auVar321,auVar268);
                            auVar1310 = vfmsub213ps_fma(auVar268,auVar658,auVar658);
                            break;
                          case 6:
                            puVar254 = (undefined4 *)
                                       (this->super_Convolution).activation_params.data;
                            uVar211 = *puVar254;
                            auVar795._4_4_ = uVar211;
                            auVar795._0_4_ = uVar211;
                            auVar795._8_4_ = uVar211;
                            auVar795._12_4_ = uVar211;
                            uVar211 = puVar254[1];
                            auVar953._4_4_ = uVar211;
                            auVar953._0_4_ = uVar211;
                            auVar953._8_4_ = uVar211;
                            auVar953._12_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(auVar953,auVar658,auVar795);
                            auVar268 = vmaxps_avx(auVar310,auVar268);
                            auVar954._8_4_ = 0x3f800000;
                            auVar954._0_8_ = 0x3f8000003f800000;
                            auVar954._12_4_ = 0x3f800000;
                            auVar268 = vminps_avx(auVar268,auVar954);
                            auVar1310._0_4_ = auVar268._0_4_ * auVar658._0_4_;
                            auVar1310._4_4_ = auVar268._4_4_ * auVar658._4_4_;
                            auVar1310._8_4_ = auVar268._8_4_ * auVar658._8_4_;
                            auVar1310._12_4_ = auVar268._12_4_ * auVar658._12_4_;
                          }
                        }
                        if (iVar187 == 1) {
                          *(int *)*local_b88 = auVar1310._0_4_;
                          uVar211 = vextractps_avx(auVar1310,1);
                          *(undefined4 *)((long)*local_b88 + lVar200 * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar1310,2);
                          *(undefined4 *)((long)*local_b88 + local_6f0._0_8_ * 4) = uVar211;
                          uVar211 = vextractps_avx(auVar1310,3);
                          *(undefined4 *)((long)*local_b88 + (long)local_8d8 * 4) = uVar211;
                          local_b88 = (undefined1 (*) [32])((long)*local_b88 + 4);
                        }
                        else if (iVar187 == 4) {
                          *(undefined1 (*) [16])local_b88 = auVar1310;
                          local_b88 = (undefined1 (*) [32])((long)local_b88 + 0x10);
                        }
                      }
                    }
                    local_9c8 = pvVar251;
                    pvVar204 = (void *)((long)pvVar251 + 1);
                  }
                  uVar247 = iVar258 * 8 + iVar207 * 4;
                  local_6d0 = (ulong)uVar247;
                  uVar209 = (long)(int)(iVar257 - uVar247) / 2;
                  local_6c8 = uVar209 & 0xffffffff;
                  lVar200 = (long)local_920.elempack;
                  lVar256 = local_920.c * lVar200;
                  local_858 = top_blob->data;
                  lVar201 = top_blob->elemsize * top_blob->cstep;
                  iVar187 = local_920.elempack * iVar249;
                  local_840 = uVar196 * 8;
                  uVar259 = top_blob->w;
                  if (top_blob->w < 1) {
                    uVar259 = 0;
                  }
                  pvVar204 = (void *)0x0;
                  local_928 = (void *)(ulong)(uint)top_blob->h;
                  if (top_blob->h < 1) {
                    local_928 = pvVar204;
                  }
                  local_798 = (void *)(long)(int)uVar247;
                  local_788 = (void *)0x0;
                  if (0 < (int)uVar209) {
                    local_788 = (void *)(uVar209 & 0xffffffff);
                  }
                  lVar216 = (long)iVar189;
                  local_960._0_8_ = lVar200;
                  local_980._0_8_ = lVar256;
                  local_780._0_4_ = iVar249;
                  while (pvVar204 != local_788) {
                    pvVar251 = (void *)((long)local_798 + (long)pvVar204 * 2);
                    uVar247 = (int)pvVar251 >> 0x1f;
                    uVar209 = (ulong)uVar247 << 0x20 | (ulong)pvVar251 & 0xffffffff;
                    iVar257 = (int)((long)uVar209 / 8);
                    local_9a0._0_4_ = iVar257;
                    local_b88 = (undefined1 (*) [32])((long)pvVar251 * lVar201 + (long)local_858);
                    local_b58 = (undefined4 *)
                                (((long)local_798 + (long)pvVar204 * 2 + 1) * lVar201 +
                                (long)local_858);
                    local_9c8 = (void *)(long)(((int)((long)((ulong)uVar247 << 0x20 |
                                                            (ulong)pvVar251 & 0xffffffff) % 4) >> 1)
                                               + iVar257 +
                                              (int)(char)((char)((long)uVar209 % 8) / '\x04'));
                    pvVar198 = (void *)0x0;
                    local_850 = pvVar204;
                    while (pvVar198 != local_928) {
                      lVar202 = (this->weight_data_tm).cstep * (long)local_9c8;
                      sVar13 = (this->weight_data_tm).elemsize;
                      pvVar204 = (this->weight_data_tm).data;
                      lVar215 = (long)pvVar198 * local_818;
                      pfVar197 = (float *)(this->super_Convolution).activation_params.data;
                      lVar216 = local_7c0._0_8_;
                      local_8d8 = pvVar198;
                      for (uVar209 = 0; auVar376 = local_9a0, uVar209 != uVar259;
                          uVar209 = uVar209 + 1) {
                        if (lVar216 == 0) {
                          fVar248 = 0.0;
                          fVar220 = 0.0;
                        }
                        else {
                          pfVar206 = (float *)(lVar216 + (long)pvVar251 * 4);
                          fVar248 = *pfVar206;
                          fVar220 = pfVar206[1];
                        }
                        lVar203 = local_920.cstep * local_920.elemsize;
                        lVar217 = local_920.w * lVar215 * local_920.elemsize;
                        lVar216 = (long)local_920.data +
                                  (long)(iVar187 * (int)uVar209) * 4 + lVar217;
                        local_9a0._0_8_ = lVar216;
                        auVar1130 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar229 = 0;
                        auVar1060 = ZEXT864(0) << 0x40;
                        pauVar236 = (undefined1 (*) [32])(lVar202 * sVar13 + (long)pvVar204);
                        while( true ) {
                          if ((int)lVar256 <= (int)((uint)uVar229 | 7)) break;
                          lVar219 = (int)((long)((ulong)(uint)((int)(uint)uVar229 >> 0x1f) << 0x20 |
                                                uVar229 & 0xffffffff) / (long)(int)lVar200) *
                                    lVar203;
                          if ((int)lVar200 == 8) {
                            pauVar253 = pauVar236;
                            for (uVar242 = 0; uVar196 != uVar242; uVar242 = uVar242 + 1) {
                              auVar1215 = *(undefined1 (*) [32])
                                           (lVar216 +
                                           (long)*(int *)((long)auVar230 + uVar242 * 4) * 4 +
                                           lVar219);
                              auVar268 = vfmadd231ps_fma(auVar1130._0_32_,auVar1215,*pauVar253);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar1215,pauVar253[1]);
                              auVar1060 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 2;
                            }
                            pauVar236 = (undefined1 (*) [32])(*pauVar236 + (long)piVar255);
                            lVar200 = local_960._0_8_;
                            lVar256 = local_980._0_8_;
                          }
                          if ((int)lVar200 == 4) {
                            pauVar253 = pauVar236;
                            for (uVar242 = 0; uVar196 != uVar242; uVar242 = uVar242 + 1) {
                              auVar613._16_16_ =
                                   *(undefined1 (*) [16])
                                    (lVar216 +
                                    (long)*(int *)((long)auVar230 + uVar242 * 4) * 4 +
                                    lVar208 * 4 + lVar219);
                              auVar613._0_16_ =
                                   *(undefined1 (*) [16])
                                    (lVar216 +
                                    (long)*(int *)((long)auVar230 + uVar242 * 4) * 4 + lVar219);
                              auVar268 = vfmadd231ps_fma(auVar1130._0_32_,auVar613,*pauVar253);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar613,pauVar253[1]);
                              auVar1060 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 2;
                            }
                            pauVar236 = (undefined1 (*) [32])(*pauVar236 + (long)piVar255);
                            lVar200 = local_960._0_8_;
                            lVar256 = local_980._0_8_;
                          }
                          if ((int)lVar200 == 1) {
                            pauVar253 = pauVar236;
                            for (uVar242 = 0; uVar196 != uVar242; uVar242 = uVar242 + 1) {
                              iVar257 = *(int *)((long)auVar230 + uVar242 * 4);
                              auVar268 = vinsertps_avx(ZEXT416(*(uint *)(lVar216 +
                                                                        (long)((int)(float)local_a40
                                                                              + iVar257) * 4 +
                                                                        lVar219)),
                                                       ZEXT416(*(uint *)(lVar216 +
                                                                        (long)(iVar257 +
                                                                              (int)(float)local_a60)
                                                                        * 4 + lVar219)),0x10);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       iVar188) * 4
                                                                                 + lVar219)),0x20);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       iVar239) * 4
                                                                                 + lVar219)),0x30);
                              auVar310 = vinsertps_avx(ZEXT416(*(uint *)(lVar216 +
                                                                        (long)iVar257 * 4 + lVar219)
                                                              ),ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       local_b80) *
                                                                                 4 + lVar219)),0x10)
                              ;
                              auVar310 = vinsertps_avx(auVar310,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar190 +
                                                                                       iVar257) * 4
                                                                                 + lVar219)),0x20);
                              auVar310 = vinsertps_avx(auVar310,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       iVar192) * 4
                                                                                 + lVar219)),0x30);
                              auVar614._16_16_ = auVar268;
                              auVar614._0_16_ = auVar310;
                              auVar268 = vfmadd231ps_fma(auVar1130._0_32_,auVar614,*pauVar253);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar614,pauVar253[1]);
                              auVar1060 = ZEXT1664(auVar268);
                              pauVar253 = pauVar253 + 2;
                            }
                            pauVar236 = (undefined1 (*) [32])(*pauVar236 + (long)piVar255);
                            lVar200 = local_960._0_8_;
                            lVar256 = local_980._0_8_;
                          }
                          uVar229 = uVar229 + 8;
                        }
                        auVar415._0_4_ = auVar1130._16_4_ + auVar1130._0_4_;
                        auVar415._4_4_ = auVar1130._20_4_ + auVar1130._4_4_;
                        auVar415._8_4_ = auVar1130._24_4_ + auVar1130._8_4_;
                        auVar415._12_4_ = auVar1130._28_4_ + auVar1130._12_4_;
                        auVar268 = vshufpd_avx(auVar415,auVar415,1);
                        auVar416._0_4_ = auVar268._0_4_ + auVar415._0_4_;
                        auVar416._4_4_ = auVar268._4_4_ + auVar415._4_4_;
                        auVar416._8_4_ = auVar268._8_4_ + auVar415._8_4_;
                        auVar416._12_4_ = auVar268._12_4_ + auVar415._12_4_;
                        auVar326._0_4_ = auVar1060._16_4_ + auVar1060._0_4_;
                        auVar326._4_4_ = auVar1060._20_4_ + auVar1060._4_4_;
                        auVar326._8_4_ = auVar1060._24_4_ + auVar1060._8_4_;
                        auVar326._12_4_ = auVar1060._28_4_ + auVar1060._12_4_;
                        auVar268 = vshufpd_avx(auVar326,auVar326,1);
                        auVar327._0_4_ = auVar268._0_4_ + auVar326._0_4_;
                        auVar327._4_4_ = auVar268._4_4_ + auVar326._4_4_;
                        auVar327._8_4_ = auVar268._8_4_ + auVar326._8_4_;
                        auVar327._12_4_ = auVar268._12_4_ + auVar326._12_4_;
                        auVar1060 = ZEXT864(0) << 0x40;
                        auVar1130 = ZEXT1664(ZEXT816(0) << 0x40);
                        for (; (int)((uint)uVar229 | 3) < (int)lVar256; uVar229 = uVar229 + 4) {
                          iVar257 = (int)lVar200;
                          lVar219 = (int)((long)((ulong)(uint)((int)(uint)uVar229 >> 0x1f) << 0x20 |
                                                uVar229 & 0xffffffff) / (long)iVar257) * lVar203;
                          if (iVar257 == 4) {
                            for (lVar205 = 0; lVar234 - lVar205 != 0; lVar205 = lVar205 + 4) {
                              auVar268 = *(undefined1 (*) [16])
                                          (lVar216 +
                                          (long)*(int *)((long)auVar230 + lVar205) * 4 + lVar219);
                              auVar310 = vfmadd231ps_fma(auVar1060._0_16_,auVar268,
                                                         *(undefined1 (*) [16])
                                                          (*pauVar236 + lVar205 * 8));
                              auVar1060 = ZEXT1664(auVar310);
                              auVar268 = vfmadd231ps_fma(auVar1130._0_16_,auVar268,
                                                         *(undefined1 (*) [16])
                                                          (*pauVar236 + lVar205 * 8 + 0x10));
                              auVar1130 = ZEXT1664(auVar268);
                            }
                            pauVar236 = (undefined1 (*) [32])(*pauVar236 + local_a00._0_8_);
                          }
                          if (iVar257 == 1) {
                            for (lVar200 = 0; lVar234 - lVar200 != 0; lVar200 = lVar200 + 4) {
                              iVar257 = *(int *)((long)auVar230 + lVar200);
                              auVar268 = vinsertps_avx(ZEXT416(*(uint *)(lVar216 +
                                                                        (long)iVar257 * 4 + lVar219)
                                                              ),ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(local_b80 +
                                                                                       iVar257) * 4
                                                                                 + lVar219)),0x10);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       iVar190) * 4
                                                                                 + lVar219)),0x20);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)(lVar216 +
                                                                                 (long)(iVar257 +
                                                                                       iVar192) * 4
                                                                                 + lVar219)),0x30);
                              auVar310 = vfmadd231ps_fma(auVar1060._0_16_,auVar268,
                                                         *(undefined1 (*) [16])
                                                          (*pauVar236 + lVar200 * 8));
                              auVar1060 = ZEXT1664(auVar310);
                              auVar268 = vfmadd231ps_fma(auVar1130._0_16_,auVar268,
                                                         *(undefined1 (*) [16])
                                                          (*pauVar236 + lVar200 * 8 + 0x10));
                              auVar1130 = ZEXT1664(auVar268);
                            }
                            pauVar236 = (undefined1 (*) [32])(*pauVar236 + local_a00._0_8_);
                            lVar200 = local_960._0_8_;
                            lVar256 = local_980._0_8_;
                          }
                        }
                        auVar268 = vshufpd_avx(auVar1060._0_16_,auVar1060._0_16_,1);
                        auVar525._0_4_ = auVar268._0_4_ + auVar1060._0_4_;
                        auVar525._4_4_ = auVar268._4_4_ + auVar1060._4_4_;
                        auVar525._8_4_ = auVar268._8_4_ + auVar1060._8_4_;
                        auVar525._12_4_ = auVar268._12_4_ + auVar1060._12_4_;
                        auVar268 = vshufpd_avx(auVar1130._0_16_,auVar1130._0_16_,1);
                        auVar661._0_4_ = auVar268._0_4_ + auVar1130._0_4_;
                        auVar661._4_4_ = auVar268._4_4_ + auVar1130._4_4_;
                        auVar661._8_4_ = auVar268._8_4_ + auVar1130._8_4_;
                        auVar661._12_4_ = auVar268._12_4_ + auVar1130._12_4_;
                        auVar268 = vinsertps_avx(auVar327,auVar416,0x4c);
                        auVar310 = vinsertps_avx(auVar416,auVar327,0x1c);
                        auVar945 = vinsertps_avx(auVar661,auVar525,0x4c);
                        auVar309 = vinsertps_avx(auVar525,auVar661,0x1c);
                        auVar1060 = ZEXT1664(CONCAT412(auVar268._12_4_ + 0.0 + auVar310._12_4_ +
                                                       auVar945._12_4_ + auVar309._12_4_,
                                                       CONCAT48(auVar268._8_4_ + 0.0 +
                                                                auVar310._8_4_ +
                                                                auVar945._8_4_ + auVar309._8_4_,
                                                                CONCAT44(auVar268._4_4_ + fVar220 +
                                                                         auVar310._4_4_ +
                                                                         auVar945._4_4_ +
                                                                         auVar309._4_4_,
                                                                         auVar268._0_4_ + fVar248 +
                                                                         auVar310._0_4_ +
                                                                         auVar945._0_4_ +
                                                                         auVar309._0_4_))));
                        lVar217 = uVar209 * CONCAT44(local_780._4_4_,(int)local_780) * 4 + lVar217;
                        for (; (long)(uVar229 | 1) < lVar256; uVar229 = uVar229 + 2) {
                          lVar216 = uVar229 * lVar203 + lVar217;
                          for (lVar219 = 0; lVar234 - lVar219 != 0; lVar219 = lVar219 + 4) {
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (long)*(int *)((long)auVar230 + lVar219) * 4 + lVar216);
                            auVar274._4_4_ = uVar211;
                            auVar274._0_4_ = uVar211;
                            auVar274._8_4_ = uVar211;
                            auVar274._12_4_ = uVar211;
                            auVar328._8_8_ = 0;
                            auVar328._0_8_ = *(ulong *)(*pauVar236 + lVar219 * 4);
                            auVar417._8_8_ = 0;
                            auVar417._0_8_ = *(ulong *)(*pauVar236 + lVar219 * 4 + 8);
                            auVar268 = vfmadd213ps_fma(auVar328,auVar274,auVar1060._0_16_);
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (*(int *)((long)auVar230 + lVar219) + lVar208) * 4 + lVar216)
                            ;
                            auVar796._4_4_ = uVar211;
                            auVar796._0_4_ = uVar211;
                            auVar796._8_4_ = uVar211;
                            auVar796._12_4_ = uVar211;
                            auVar268 = vfmadd213ps_fma(auVar796,auVar417,auVar268);
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          pauVar236 = (undefined1 (*) [32])(*pauVar236 + local_9c0._0_8_);
                        }
                        for (; auVar798 = auVar1060._0_16_, (long)uVar229 < lVar256;
                            uVar229 = uVar229 + 1) {
                          for (uVar242 = 0; uVar196 != uVar242; uVar242 = uVar242 + 1) {
                            auVar275._8_8_ = 0;
                            auVar275._0_8_ = *(ulong *)(*pauVar236 + uVar242 * 8);
                            uVar211 = *(undefined4 *)
                                       ((long)local_920.data +
                                       (long)*(int *)((long)auVar230 + uVar242 * 4) * 4 +
                                       uVar229 * lVar203 + lVar217);
                            auVar329._4_4_ = uVar211;
                            auVar329._0_4_ = uVar211;
                            auVar329._8_4_ = uVar211;
                            auVar329._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1060._0_16_,auVar275,auVar329);
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          pauVar236 = (undefined1 (*) [32])(*pauVar236 + local_840);
                        }
                        if (5 < local_760 - 1U) goto LAB_001c5167;
                        auVar268 = vmovshdup_avx(auVar798);
                        fVar248 = auVar1060._0_4_;
                        local_a80 = piVar255;
                        switch(local_760) {
                        case 1:
                          auVar798 = vmaxps_avx(auVar798,_DAT_00533020);
                          break;
                        case 2:
                          auVar268 = vcmpps_avx(ZEXT816(0) << 0x40,auVar798,1);
                          fVar248 = *pfVar197;
                          auVar332._4_4_ = fVar248;
                          auVar332._0_4_ = fVar248;
                          auVar332._8_4_ = fVar248;
                          auVar332._12_4_ = fVar248;
                          auVar418._8_4_ = 0x3f800000;
                          auVar418._0_8_ = 0x3f8000003f800000;
                          auVar418._12_4_ = 0x3f800000;
                          auVar268 = vblendvps_avx(auVar332,auVar418,auVar268);
                          goto LAB_001c515b;
                        case 3:
                          auVar276._8_8_ = 0;
                          auVar276._0_8_ = *(ulong *)pfVar197;
                          auVar309 = vmaxss_avx(auVar276,auVar798);
                          auVar310 = vinsertps_avx(auVar276,auVar309,0x10);
                          auVar945 = vinsertps_avx(auVar268,auVar276,0x50);
                          auVar310 = vcmpps_avx(auVar945,auVar310,1);
                          auVar268 = vinsertps_avx(auVar268,auVar309,0x10);
                          auVar268 = vblendvps_avx(auVar268,auVar276,auVar310);
                          auVar798 = vshufps_avx(auVar268,auVar268,0xe1);
                          auVar268 = vcmpps_avx(auVar276,auVar798,1);
                          if ((auVar268 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            auVar798 = vinsertps_avx(auVar798,auVar276,0x50);
                          }
                          break;
                        case 4:
                          auVar526._8_4_ = 0x42b0c0a5;
                          auVar526._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar526._12_4_ = 0x42b0c0a5;
                          auVar310 = vminps_avx(auVar798,auVar526);
                          auVar330._8_4_ = 0xc2b0c0a5;
                          auVar330._0_8_ = 0xc2b0c0a5c2b0c0a5;
                          auVar330._12_4_ = 0xc2b0c0a5;
                          auVar268 = vcmpps_avx(auVar310,auVar330,1);
                          auVar277._0_8_ = auVar310._0_8_ ^ 0x8000000080000000;
                          auVar277._8_4_ = auVar310._8_4_ ^ 0x80000000;
                          auVar277._12_4_ = auVar310._12_4_ ^ 0x80000000;
                          auVar268 = vblendvps_avx(auVar277,auVar526,auVar268);
                          fVar248 = expf(auVar268._0_4_);
                          auVar376 = local_9a0;
                          local_9a0._4_4_ = extraout_XMM0_Db_00;
                          local_9a0._0_4_ = fVar248;
                          local_9a0._8_4_ = extraout_XMM0_Dc_00;
                          local_9a0._16_16_ = auVar376._16_16_;
                          local_9a0._12_4_ = extraout_XMM0_Dd_00;
                          auVar268 = vmovshdup_avx(auVar268);
                          auVar1452._0_4_ = expf(auVar268._0_4_);
                          auVar1452._4_60_ = extraout_var_00;
                          auVar268 = vinsertps_avx(local_9a0._0_16_,auVar1452._0_16_,0x10);
                          auVar331._8_4_ = 0x3f800000;
                          auVar331._0_8_ = 0x3f8000003f800000;
                          auVar331._12_4_ = 0x3f800000;
                          auVar278._0_4_ = auVar268._0_4_ + 1.0;
                          auVar278._4_4_ = auVar268._4_4_ + 1.0;
                          auVar278._8_4_ = auVar268._8_4_ + 1.0;
                          auVar278._12_4_ = auVar268._12_4_ + 1.0;
                          auVar798 = vdivps_avx(auVar331,auVar278);
                          lVar200 = local_960._0_8_;
                          lVar256 = local_980._0_8_;
                          piVar255 = local_a80;
                          break;
                        case 5:
                          local_9a0._16_16_ = auVar376._16_16_;
                          local_9a0._0_16_ = auVar798;
                          local_6f0 = auVar268;
                          fVar248 = expf(fVar248);
                          fVar248 = logf(fVar248 + 1.0);
                          local_ab0._0_4_ = tanhf(fVar248);
                          local_ab0._4_4_ = extraout_XMM0_Db;
                          local_ab0._8_4_ = extraout_XMM0_Dc;
                          local_ab0._12_4_ = extraout_XMM0_Dd;
                          fVar248 = expf((float)local_6f0._0_4_);
                          fVar248 = logf(fVar248 + 1.0);
                          auVar1379._0_4_ = tanhf(fVar248);
                          auVar1379._4_60_ = extraout_var;
                          auVar268 = vinsertps_avx(local_ab0,auVar1379._0_16_,0x10);
                          lVar200 = local_960._0_8_;
                          lVar256 = local_980._0_8_;
                          auVar798 = local_9a0._0_16_;
                          piVar255 = local_a80;
LAB_001c515b:
                          auVar797._0_4_ = auVar268._0_4_ * auVar798._0_4_;
                          auVar797._4_4_ = auVar268._4_4_ * auVar798._4_4_;
                          auVar797._8_4_ = auVar268._8_4_ * auVar798._8_4_;
                          auVar797._12_4_ = auVar268._12_4_ * auVar798._12_4_;
                          auVar798 = auVar797;
                          break;
                        case 6:
                          fVar220 = *pfVar197;
                          fVar864 = pfVar197[1];
                          fVar865 = -fVar864 / fVar220;
                          auVar310 = SUB6416(ZEXT464(0),0) << 0x20;
                          if ((fVar865 <= fVar248) &&
                             (auVar310 = auVar798, fVar248 <= fVar865 + 1.0 / fVar220)) {
                            auVar310 = vfmadd213ss_fma(auVar798,ZEXT416((uint)fVar220),
                                                       ZEXT416((uint)fVar864));
                            auVar310 = ZEXT416((uint)(auVar310._0_4_ * fVar248));
                          }
                          fVar248 = auVar268._0_4_;
                          if (fVar865 <= fVar248) {
                            auVar798._4_12_ = auVar1060._4_12_;
                            auVar798._0_4_ = auVar310._0_4_;
                            if (fVar248 <= fVar865 + 1.0 / fVar220) {
                              auVar268 = vfmadd213ss_fma(ZEXT416((uint)fVar220),auVar268,
                                                         ZEXT416((uint)fVar864));
                              auVar798 = vinsertps_avx(auVar798,ZEXT416((uint)(auVar268._0_4_ *
                                                                              fVar248)),0x10);
                            }
                          }
                          else {
                            auVar798 = vblendps_avx(auVar310,_DAT_00533020,0xe);
                          }
                          goto LAB_001c5167;
                        }
LAB_001c5167:
                        *(int *)local_b88 = auVar798._0_4_;
                        uVar211 = vextractps_avx(auVar798,1);
                        *local_b58 = uVar211;
                        local_b88 = (undefined1 (*) [32])((long)local_b88 + 4);
                        local_b58 = local_b58 + 1;
                        lVar216 = local_7c0._0_8_;
                      }
                      pvVar198 = (void *)((long)local_8d8 + 1);
                    }
                    lVar216 = CONCAT44(local_a20._4_4_,(int)local_a20);
                    pvVar204 = (void *)((long)local_850 + 1);
                  }
                  local_880._0_8_ = local_880._0_8_ * lVar216;
                  sVar13 = top_blob->elemsize;
                  sVar14 = top_blob->cstep;
                  if ((int)uVar244 < 1) {
                    uVar210 = 0;
                  }
                  iVar187 = (int)local_6e0;
                  local_6e0 = (undefined1 (*) [32])((ulong)local_6e0 & 0xffffffff);
                  if (iVar187 < 1) {
                    local_6e0 = (undefined1 (*) [32])0x0;
                  }
                  pvVar204 = top_blob->data;
                  for (uVar209 = (ulong)((int)local_6d0 + (int)local_6c8 * 2);
                      (long)uVar209 < (long)local_790; uVar209 = uVar209 + 1) {
                    uVar259 = (int)uVar209 >> 0x1f;
                    uVar229 = (ulong)uVar259 << 0x20 | uVar209 & 0xffffffff;
                    local_960._0_8_ = (void *)(sVar13 * sVar14 * uVar209 + (long)pvVar204);
                    for (pauVar236 = (undefined1 (*) [32])0x0; pauVar236 != local_6e0;
                        pauVar236 = (undefined1 (*) [32])(*pauVar236 + 1)) {
                      sVar11 = (this->weight_data_tm).cstep;
                      sVar12 = (this->weight_data_tm).elemsize;
                      pvVar251 = (this->weight_data_tm).data;
                      lVar256 = (long)pauVar236 * local_818;
                      pfVar197 = (float *)(this->super_Convolution).activation_params.data;
                      lVar200 = local_7c0._0_8_;
                      for (uVar242 = 0; uVar242 != uVar210; uVar242 = uVar242 + 1) {
                        if (lVar200 == 0) {
                          fVar248 = 0.0;
                        }
                        else {
                          fVar248 = *(float *)(lVar200 + uVar209 * 4);
                        }
                        local_9a0._0_8_ = uVar242;
                        lVar200 = local_920.cstep * local_920.elemsize;
                        piVar222 = (int *)(local_920.w * lVar256 * local_920.elemsize +
                                          (long)local_920.data);
                        local_980._0_8_ = piVar222;
                        piVar255 = piVar222 + iVar249 * (int)lVar216 * (int)uVar242;
                        local_a80._4_4_ = (int)((ulong)piVar255 >> 0x20);
                        auVar1060 = ZEXT864(0) << 0x40;
                        uVar237 = 0;
                        pvVar198 = (void *)(sVar11 * (long)((int)((long)((ulong)uVar259 << 0x20 |
                                                                        uVar209 & 0xffffffff) % 2) +
                                                            (int)((long)uVar229 / 8) +
                                                            (int)(char)((char)((long)uVar229 % 8) /
                                                                       '\x04') +
                                                           (int)(char)((char)((long)((ulong)uVar259
                                                                                     << 0x20 |
                                                                                    uVar209 & 
                                                  0xffffffff) % 4) / '\x02')) * sVar12 +
                                           (long)pvVar251);
                        while( true ) {
                          if ((int)local_880._0_4_ <= (int)((uint)uVar237 | 7)) break;
                          lVar201 = (int)((long)((ulong)(uint)((int)(uint)uVar237 >> 0x1f) << 0x20 |
                                                uVar237 & 0xffffffff) / (long)(int)local_a20) *
                                    lVar200;
                          if ((int)local_a20 == 8) {
                            for (lVar215 = 0; lVar234 - lVar215 != 0; lVar215 = lVar215 + 4) {
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,
                                                         *(undefined1 (*) [32])
                                                          ((long)piVar255 +
                                                          (long)*(int *)((long)auVar230 + lVar215) *
                                                          4 + lVar201),
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar198 + lVar215 * 8));
                              auVar1060 = ZEXT1664(auVar268);
                            }
                            pvVar198 = (void *)((long)pvVar198 + local_a00._0_8_);
                          }
                          if ((int)local_a20 == 4) {
                            for (lVar215 = 0; lVar234 - lVar215 != 0; lVar215 = lVar215 + 4) {
                              auVar501._16_16_ =
                                   *(undefined1 (*) [16])
                                    ((long)piVar255 +
                                    (long)*(int *)((long)auVar230 + lVar215) * 4 +
                                    lVar208 * 4 + lVar201);
                              auVar501._0_16_ =
                                   *(undefined1 (*) [16])
                                    ((long)piVar255 +
                                    (long)*(int *)((long)auVar230 + lVar215) * 4 + lVar201);
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar501,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar198 + lVar215 * 8));
                              auVar1060 = ZEXT1664(auVar268);
                            }
                            pvVar198 = (void *)((long)pvVar198 + local_a00._0_8_);
                          }
                          if ((int)local_a20 == 1) {
                            for (lVar215 = 0; lVar234 - lVar215 != 0; lVar215 = lVar215 + 4) {
                              iVar187 = *(int *)((long)auVar230 + lVar215);
                              auVar268 = vinsertps_avx(ZEXT416(*(uint *)((long)piVar255 +
                                                                        (long)(iVar187 +
                                                                              (int)(float)local_a40)
                                                                        * 4 + lVar201)),
                                                       ZEXT416(*(uint *)((long)piVar255 +
                                                                        (long)(iVar187 +
                                                                              (int)(float)local_a60)
                                                                        * 4 + lVar201)),0x10);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       iVar188) * 4
                                                                                 + lVar201)),0x20);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       iVar239) * 4
                                                                                 + lVar201)),0x30);
                              auVar310 = vinsertps_avx(ZEXT416(*(uint *)((long)piVar255 +
                                                                        (long)iVar187 * 4 + lVar201)
                                                              ),ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       local_b80) *
                                                                                 4 + lVar201)),0x10)
                              ;
                              auVar310 = vinsertps_avx(auVar310,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       iVar190) * 4
                                                                                 + lVar201)),0x20);
                              auVar310 = vinsertps_avx(auVar310,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       iVar192) * 4
                                                                                 + lVar201)),0x30);
                              auVar502._16_16_ = auVar268;
                              auVar502._0_16_ = auVar310;
                              auVar268 = vfmadd231ps_fma(auVar1060._0_32_,auVar502,
                                                         *(undefined1 (*) [32])
                                                          ((long)pvVar198 + lVar215 * 8));
                              auVar1060 = ZEXT1664(auVar268);
                            }
                            pvVar198 = (void *)((long)pvVar198 + local_a00._0_8_);
                          }
                          uVar237 = uVar237 + 8;
                        }
                        auVar333._0_4_ = auVar1060._16_4_ + auVar1060._0_4_;
                        auVar333._4_4_ = auVar1060._20_4_ + auVar1060._4_4_;
                        auVar333._8_4_ = auVar1060._24_4_ + auVar1060._8_4_;
                        auVar333._12_4_ = auVar1060._28_4_ + auVar1060._12_4_;
                        auVar268 = vshufpd_avx(auVar333,auVar333,1);
                        auVar334._0_4_ = auVar268._0_4_ + auVar333._0_4_;
                        auVar334._4_4_ = auVar268._4_4_ + auVar333._4_4_;
                        auVar334._8_4_ = auVar268._8_4_ + auVar333._8_4_;
                        auVar334._12_4_ = auVar268._12_4_ + auVar333._12_4_;
                        auVar1060 = ZEXT864(0) << 0x40;
                        for (; (int)((uint)uVar237 | 3) < (int)local_880._0_4_;
                            uVar237 = uVar237 + 4) {
                          lVar201 = (int)((long)((ulong)(uint)((int)(uint)uVar237 >> 0x1f) << 0x20 |
                                                uVar237 & 0xffffffff) / (long)(int)local_a20) *
                                    lVar200;
                          if ((int)local_a20 == 4) {
                            for (lVar215 = 0; lVar234 - lVar215 != 0; lVar215 = lVar215 + 4) {
                              auVar268 = vfmadd231ps_fma(auVar1060._0_16_,
                                                         *(undefined1 (*) [16])
                                                          ((long)piVar255 +
                                                          (long)*(int *)((long)auVar230 + lVar215) *
                                                          4 + lVar201),
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar198 + lVar215 * 4));
                              auVar1060 = ZEXT1664(auVar268);
                            }
                            pvVar198 = (void *)((long)pvVar198 + local_9c0._0_8_);
                          }
                          if ((int)local_a20 == 1) {
                            for (lVar215 = 0; lVar234 - lVar215 != 0; lVar215 = lVar215 + 4) {
                              iVar187 = *(int *)((long)auVar230 + lVar215);
                              auVar268 = vinsertps_avx(ZEXT416(*(uint *)((long)piVar255 +
                                                                        (long)iVar187 * 4 + lVar201)
                                                              ),ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(local_b80 +
                                                                                       iVar187) * 4
                                                                                 + lVar201)),0x10);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar190 +
                                                                                       iVar187) * 4
                                                                                 + lVar201)),0x20);
                              auVar268 = vinsertps_avx(auVar268,ZEXT416(*(uint *)((long)piVar255 +
                                                                                 (long)(iVar187 +
                                                                                       iVar192) * 4
                                                                                 + lVar201)),0x30);
                              auVar268 = vfmadd231ps_fma(auVar1060._0_16_,auVar268,
                                                         *(undefined1 (*) [16])
                                                          ((long)pvVar198 + lVar215 * 4));
                              auVar1060 = ZEXT1664(auVar268);
                            }
                            pvVar198 = (void *)((long)pvVar198 + local_9c0._0_8_);
                          }
                        }
                        auVar268 = vmovshdup_avx(auVar334);
                        auVar310 = vshufpd_avx(auVar1060._0_16_,auVar1060._0_16_,1);
                        auVar419._0_4_ = auVar310._0_4_ + auVar1060._0_4_;
                        auVar419._4_4_ = auVar310._4_4_ + auVar1060._4_4_;
                        auVar419._8_4_ = auVar310._8_4_ + auVar1060._8_4_;
                        auVar419._12_4_ = auVar310._12_4_ + auVar1060._12_4_;
                        auVar310 = vmovshdup_avx(auVar419);
                        auVar1060 = ZEXT464((uint)(auVar268._0_4_ + fVar248 + auVar334._0_4_ +
                                                  auVar310._0_4_ + auVar419._0_4_));
                        lVar201 = uVar242 * CONCAT44(local_780._4_4_,(int)local_780);
                        for (; (long)(uVar237 | 1) < (long)local_880._0_8_; uVar237 = uVar237 + 2) {
                          lVar215 = uVar237 * lVar200 + lVar201 * 4;
                          for (uVar232 = 0; uVar196 != uVar232; uVar232 = uVar232 + 1) {
                            auVar268 = vfmadd231ss_fma(auVar1060._0_16_,
                                                       ZEXT416(*(uint *)((long)pvVar198 +
                                                                        uVar232 * 8)),
                                                       ZEXT416(*(uint *)((long)piVar222 +
                                                                        (long)*(int *)((long)
                                                  auVar230 + uVar232 * 4) * 4 + lVar215)));
                            auVar268 = vfmadd231ss_fma(auVar268,ZEXT416(*(uint *)((long)pvVar198 +
                                                                                 uVar232 * 8 + 4)),
                                                       ZEXT416(*(uint *)((long)piVar222 +
                                                                        (*(int *)((long)auVar230 +
                                                                                 uVar232 * 4) +
                                                                        lVar208) * 4 + lVar215)));
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          pvVar198 = (void *)((long)pvVar198 + local_840);
                        }
                        for (; (long)uVar237 < (long)local_880._0_8_; uVar237 = uVar237 + 1) {
                          for (uVar232 = 0; uVar196 != uVar232; uVar232 = uVar232 + 1) {
                            auVar268 = vfmadd231ss_fma(auVar1060._0_16_,
                                                       ZEXT416(*(uint *)((long)pvVar198 +
                                                                        uVar232 * 4)),
                                                       ZEXT416(*(uint *)((long)piVar222 +
                                                                        (long)*(int *)((long)
                                                  auVar230 + uVar232 * 4) * 4 +
                                                  uVar237 * lVar200 + lVar201 * 4)));
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          pvVar198 = (void *)((long)pvVar198 + lVar234);
                        }
                        auVar268 = auVar1060._0_16_;
                        local_a80._0_4_ = auVar1060._0_4_;
                        fVar248 = (float)local_a80;
                        switch(local_760) {
                        case 1:
                          auVar268 = vmaxss_avx(auVar268,ZEXT416(0));
                          fVar248 = auVar268._0_4_;
                          break;
                        case 2:
                          auVar268 = vcmpss_avx(ZEXT416(0) << 0x20,auVar268,1);
                          auVar421._8_4_ = 0x3f800000;
                          auVar421._0_8_ = 0x3f8000003f800000;
                          auVar421._12_4_ = 0x3f800000;
                          auVar268 = vblendvps_avx(ZEXT416((uint)*pfVar197),auVar421,auVar268);
                          fVar248 = auVar268._0_4_ * (float)local_a80;
                          break;
                        case 3:
                          auVar268 = vmaxss_avx(auVar268,ZEXT416((uint)*pfVar197));
                          fVar248 = auVar268._0_4_;
                          if (pfVar197[1] < auVar268._0_4_) {
                            fVar248 = pfVar197[1];
                          }
                          goto switchD_001c5784_default;
                        case 4:
                          auVar268 = vminss_avx(auVar268,ZEXT416(0x42b0c0a5));
                          auVar335._0_8_ = auVar268._0_8_ ^ 0x8000000080000000;
                          auVar335._8_4_ = auVar268._8_4_ ^ 0x80000000;
                          auVar335._12_4_ = auVar268._12_4_ ^ 0x80000000;
                          auVar268 = vcmpss_avx(auVar268,ZEXT416(0xc2b0c0a5),1);
                          auVar420._8_4_ = 0x42b0c0a5;
                          auVar420._0_8_ = 0x42b0c0a542b0c0a5;
                          auVar420._12_4_ = 0x42b0c0a5;
                          auVar268 = vblendvps_avx(auVar335,auVar420,auVar268);
                          local_a80 = piVar255;
                          fVar248 = expf(auVar268._0_4_);
                          fVar248 = 1.0 / (fVar248 + 1.0);
                          uVar242 = local_9a0._0_8_;
                          piVar255 = local_a80;
                          break;
                        case 5:
                          fVar248 = expf((float)local_a80);
                          fVar248 = logf(fVar248 + 1.0);
                          fVar248 = tanhf(fVar248);
                          fVar248 = fVar248 * (float)local_a80;
                          uVar242 = local_9a0._0_8_;
                          piVar255 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                          break;
                        case 6:
                          fVar220 = *pfVar197;
                          fVar864 = -pfVar197[1] / fVar220;
                          fVar248 = 0.0;
                          if ((fVar864 <= (float)local_a80) &&
                             (fVar248 = (float)local_a80,
                             (float)local_a80 <= fVar864 + 1.0 / fVar220)) {
                            auVar268 = vfmadd213ss_fma(ZEXT416((uint)fVar220),auVar268,
                                                       ZEXT416((uint)pfVar197[1]));
                            fVar248 = auVar268._0_4_ * (float)local_a80;
                          }
                        default:
                          goto switchD_001c5784_default;
                        }
switchD_001c5784_default:
                        *(float *)local_960._0_8_ = fVar248;
                        local_960._0_8_ = (float *)(local_960._0_8_ + 4);
                        lVar200 = local_7c0._0_8_;
                      }
                    }
                  }
                  local_a80 = piVar255;
                  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                            ((_Vector_base<int,_std::allocator<int>_> *)local_660);
                }
                iVar189 = 0;
                goto LAB_001c6881;
              }
            }
            iVar187 = this->nT;
            iVar188 = iVar187;
            if (iVar187 == 0) {
              iVar188 = opt->num_threads;
            }
            local_760 = iVar257;
            if (opt->num_threads != iVar187 && iVar187 != 0) {
              fprintf(_stderr,
                      "opt.num_threads %d changed, convolution gemm will use load-time value %d");
              fputc(10,_stderr);
              auVar1215 = local_960;
              auVar376 = local_980;
              local_960._4_4_ = 0;
              local_960._0_4_ = (this->super_Convolution).kernel_w;
              local_960._8_24_ = auVar1215._8_24_;
              local_980._4_4_ = 0;
              local_980._0_4_ = (this->super_Convolution).kernel_h;
              local_980._8_24_ = auVar376._8_24_;
              local_a60._0_4_ = (float)(this->super_Convolution).dilation_w;
              local_840._0_4_ = (this->super_Convolution).dilation_h;
              iVar249 = (this->super_Convolution).stride_w;
              local_760 = (this->super_Convolution).stride_h;
            }
            local_840._4_4_ = 0;
            local_a60._4_4_ = 0;
            iStack_75c = 0;
            uVar244 = top_blob->elempack * top_blob->c;
            uVar209 = (ulong)uVar244;
            uVar247 = top_blob->h * top_blob->w;
            pvVar204 = (void *)(ulong)uVar247;
            uVar259 = local_980._0_4_ * local_960._0_4_ * local_920.c * local_920.elempack;
            local_a40._4_4_ = 0;
            local_a40._0_4_ = (float)iVar188;
            convolution_im2col_gemm_get_optimal_tile_mnk
                      (uVar244,uVar247,uVar259,(int *)&local_810,(int *)&local_738,(int *)&local_6b8
                       ,iVar188);
            local_6c8 = CONCAT44(local_6c8._4_4_,
                                 (int)(uVar244 + (int)local_810.data + -1) / (int)local_810.data);
            local_a20._0_4_ = (int)(uVar247 + (int)local_738.data + -1) / (int)local_738.data;
            local_a00._0_4_ = (int)(uVar259 + (uint)local_6b8.data + -1) / (int)(uint)local_6b8.data
            ;
            local_620 = 0;
            local_660 = (undefined1  [8])0x0;
            afStack_658[0] = 0.0;
            afStack_658[1] = 0.0;
            uStack_650 = (pointer)0x0;
            afStack_648[0] = 0.0;
            local_640 = (Allocator *)0x0;
            iStack_638 = 0;
            fStack_634 = 0.0;
            fStack_630 = 0.0;
            iStack_62c = 0;
            iStack_628 = 0;
            Mat::create((Mat *)local_660,(uint)local_6b8.data * (int)local_738.data,local_a00._0_4_,
                        (int)local_a20,4,opt->workspace_allocator);
            uVar210 = 0xffffffffffffff9c;
            local_798 = pvVar204;
            local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60);
            local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
            local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
            local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20);
            if ((local_660 != (undefined1  [8])0x0) &&
               (local_670 = uVar209, local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60),
               local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40),
               local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80),
               local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20),
               (long)iStack_628 * local_620 != 0)) {
              local_a20._0_4_ = (int)local_a20 * local_a00._0_4_;
              iVar188 = local_960._0_4_;
              iVar239 = local_980._0_4_;
              bVar184 = iVar239 == 1 && iVar188 == 1;
              bVar262 = (float)local_a60 == 1.4013e-45;
              bVar263 = (uint)local_840 == 1;
              bVar186 = bVar263 && bVar262;
              bVar185 = local_760 == 1 && iVar249 == 1;
              local_9c0[0] = (bVar184 && bVar186) && bVar185;
              bVar264 = iVar249 == 2;
              bVar265 = local_760 == 2;
              local_880[0] = bVar184 && (bVar265 && bVar264);
              bVar184 = (iVar239 == 3 && iVar188 == 3) && bVar186;
              local_9a0[0] = bVar184 && bVar185;
              local_7c0[0] = bVar184 && (bVar265 && bVar264);
              local_780._0_4_ =
                   CONCAT31(local_780._1_3_,bVar185 && ((iVar239 == 5 && iVar188 == 5) && bVar186));
              iVar257 = 0;
              iVar187 = (int)(float)local_a40;
              if ((int)local_a20 < 1) {
                local_a20._0_4_ = 0;
              }
              while( true ) {
                uVar244 = (uint)local_6b8.data;
                if (iVar257 == (int)local_a20) break;
                iVar189 = (int)local_738.data * (iVar257 / (int)local_a00._0_4_);
                iVar192 = (uint)local_6b8.data * (iVar257 % (int)local_a00._0_4_);
                iVar258 = (int)pvVar204 - iVar189;
                if ((int)local_738.data < iVar258) {
                  iVar258 = (int)local_738.data;
                }
                uVar244 = uVar259 - iVar192;
                if ((int)(uint)local_6b8.data < (int)(uVar259 - iVar192)) {
                  uVar244 = (uint)local_6b8.data;
                }
                local_890 = (size_t)(int)fStack_634;
                local_8d0 = (undefined1  [8])
                            ((long)local_660 +
                            (uint)(iVar257 % (int)local_a00._0_4_) * local_890 * (long)uStack_650 +
                            (long)(iVar257 / (int)local_a00._0_4_) * local_620 * (long)uStack_650);
                fStack_8c8 = 0.0;
                uStack_8c4 = 0;
                local_8c0 = (byte)uStack_650;
                uStack_8bf = (undefined7)((ulong)uStack_650 >> 8);
                local_8b8 = afStack_648[0];
                local_8b0 = local_640;
                iStack_8a8 = 2;
                fStack_8a4 = fStack_634;
                fStack_8a0 = 1.4013e-45;
                iStack_89c = 1;
                iStack_898 = 1;
                local_a80._0_4_ = (float)iVar257;
                if (local_9c0[0] == '\0') {
                  if (local_880[0] == '\0') {
                    if (local_9a0[0] == '\0') {
                      if (local_7c0[0] == '\0') {
                        if ((char)local_780 == '\0') {
                          if (((iVar239 == 5 && iVar188 == 5) && (bVar263 && bVar262)) &&
                              (bVar265 && bVar264)) {
                            convolution_im2col_input_tile_avx<5,5,1,1,2,2>
                                      (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                          }
                          else if (((iVar239 == 7 && iVar188 == 7) && (bVar263 && bVar262)) &&
                                   (bVar265 && bVar264)) {
                            convolution_im2col_input_tile_avx<7,7,1,1,2,2>
                                      (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                          }
                          else {
                            convolution_im2col_input_tile_impl
                                      (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244,
                                       local_960._0_4_,local_980._0_4_,(int)(float)local_a60,
                                       (uint)local_840,iVar249,local_760);
                          }
                        }
                        else {
                          convolution_im2col_input_tile_avx<5,5,1,1,1,1>
                                    (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                        }
                      }
                      else {
                        convolution_im2col_input_tile_avx<3,3,1,1,2,2>
                                  (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                      }
                    }
                    else {
                      convolution_im2col_input_tile_avx<3,3,1,1,1,1>
                                (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                    }
                  }
                  else {
                    convolution_im2col_input_tile_avx<1,1,1,1,2,2>
                              (&local_920,(Mat *)local_8d0,iVar189,iVar258,iVar192,uVar244);
                  }
                }
                else {
                  iVar257 = iVar192 / 8;
                  iVar193 = (int)uVar244 / 8;
                  iVar190 = iVar192 / 4;
                  iVar207 = (int)uVar244 / 4;
                  if (iVar193 < 1) {
                    iVar193 = 0;
                  }
                  if (iVar207 < 1) {
                    iVar207 = 0;
                  }
                  if ((int)uVar244 < 1) {
                    uVar244 = 0;
                  }
                  lVar234 = (long)iVar258;
                  lVar256 = (long)iVar189;
                  lVar208 = lVar256 * 4;
                  lVar200 = lVar256 * 4 + 4;
                  pauVar236 = (undefined1 (*) [32])local_8d0;
                  for (uVar210 = 0; (long)uVar210 < lVar234 + -0xb; uVar210 = uVar210 + 0xc) {
                    if (local_920.elempack == 8) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x20 +
                                  local_920.cstep * (long)iVar257 * local_920.elemsize);
                      iVar187 = iVar193;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar376 = vunpcklps_avx(*pauVar253,pauVar253[1]);
                        auVar1215 = vunpckhps_avx(*pauVar253,pauVar253[1]);
                        auVar595 = vunpcklps_avx(pauVar253[2],pauVar253[3]);
                        auVar1449 = vunpckhps_avx(pauVar253[2],pauVar253[3]);
                        auVar1113 = vunpcklps_avx(pauVar253[4],pauVar253[5]);
                        auVar1485 = vunpckhps_avx(pauVar253[4],pauVar253[5]);
                        auVar1114 = vunpcklps_avx(pauVar253[6],pauVar253[7]);
                        auVar613 = vunpckhps_avx(pauVar253[6],pauVar253[7]);
                        auVar1115 = vunpcklps_avx(pauVar253[8],pauVar253[9]);
                        auVar593 = vunpckhps_avx(pauVar253[8],pauVar253[9]);
                        auVar1116 = vunpcklps_avx(pauVar253[10],pauVar253[0xb]);
                        auVar304 = vunpckhps_avx(pauVar253[10],pauVar253[0xb]);
                        auVar594 = vunpcklpd_avx(auVar376,auVar595);
                        auVar376 = vunpckhpd_avx(auVar376,auVar595);
                        auVar595 = vunpcklpd_avx(auVar1215,auVar1449);
                        auVar1215 = vunpckhpd_avx(auVar1215,auVar1449);
                        auVar1112 = vunpcklpd_avx(auVar1113,auVar1114);
                        auVar1449 = vunpckhpd_avx(auVar1113,auVar1114);
                        auVar1113 = vunpcklpd_avx(auVar1485,auVar613);
                        auVar1485 = vunpckhpd_avx(auVar1485,auVar613);
                        auVar1114 = vunpcklpd_avx(auVar1115,auVar1116);
                        auVar613 = vunpckhpd_avx(auVar1115,auVar1116);
                        auVar1115 = vunpcklpd_avx(auVar593,auVar304);
                        auVar593 = vunpckhpd_avx(auVar593,auVar304);
                        auVar1171._16_16_ = auVar1112._0_16_;
                        auVar1171._0_16_ = auVar594._0_16_;
                        auVar304 = vperm2f128_avx(auVar594,auVar1112,0x31);
                        auVar1264._16_16_ = auVar376._0_16_;
                        auVar1264._0_16_ = auVar1114._0_16_;
                        auVar376 = vperm2f128_avx(auVar1114,auVar376,0x31);
                        auVar892._16_16_ = auVar613._0_16_;
                        auVar892._0_16_ = auVar1449._0_16_;
                        auVar1449 = vperm2f128_avx(auVar1449,auVar613,0x31);
                        auVar961._16_16_ = auVar1113._0_16_;
                        auVar961._0_16_ = auVar595._0_16_;
                        auVar613 = vperm2f128_avx(auVar595,auVar1113,0x31);
                        auVar1337._16_16_ = auVar1215._0_16_;
                        auVar1337._0_16_ = auVar1115._0_16_;
                        auVar1215 = vperm2f128_avx(auVar1115,auVar1215,0x31);
                        auVar1096._16_16_ = auVar593._0_16_;
                        auVar1096._0_16_ = auVar1485._0_16_;
                        auVar1485 = vperm2f128_avx(auVar1485,auVar593,0x31);
                        *pauVar236 = auVar1171;
                        pauVar236[1] = auVar1264;
                        pauVar236[2] = auVar892;
                        pauVar236[3] = auVar961;
                        pauVar236[4] = auVar1337;
                        pauVar236[5] = auVar1096;
                        pauVar236[6] = auVar304;
                        pauVar236[7] = auVar376;
                        pauVar236[8] = auVar1449;
                        pauVar236[9] = auVar613;
                        pauVar236[10] = auVar1215;
                        pauVar236[0xb] = auVar1485;
                        pauVar236 = pauVar236 + 0xc;
                        pauVar253 = pauVar253 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 4) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x10 +
                                  local_920.cstep * (long)iVar190 * local_920.elemsize);
                      iVar187 = iVar207;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar945 = vpunpckldq_avx(*pauVar226,pauVar226[1]);
                        auVar309 = vpunpckldq_avx(pauVar226[2],pauVar226[3]);
                        auVar268 = vpunpckhdq_avx(*pauVar226,pauVar226[1]);
                        auVar310 = vpunpckhdq_avx(pauVar226[2],pauVar226[3]);
                        auVar534 = vpunpcklqdq_avx(auVar945,auVar309);
                        auVar945 = vpunpckhqdq_avx(auVar945,auVar309);
                        auVar309 = vpunpcklqdq_avx(auVar268,auVar310);
                        auVar268 = vpunpckhqdq_avx(auVar268,auVar310);
                        auVar310 = vunpcklps_avx(pauVar226[4],pauVar226[5]);
                        auVar1168 = vunpcklps_avx(pauVar226[6],pauVar226[7]);
                        auVar668 = vunpckhps_avx(pauVar226[4],pauVar226[5]);
                        auVar413 = vunpckhps_avx(pauVar226[6],pauVar226[7]);
                        auVar1135 = vunpcklpd_avx(auVar310,auVar1168);
                        auVar310 = vunpckhpd_avx(auVar310,auVar1168);
                        auVar1074 = vunpcklpd_avx(auVar668,auVar413);
                        auVar668 = vunpckhpd_avx(auVar668,auVar413);
                        auVar413 = vunpcklps_avx(pauVar226[8],pauVar226[9]);
                        auVar1076 = vunpcklps_avx(pauVar226[10],pauVar226[0xb]);
                        auVar1168 = vunpckhps_avx(pauVar226[8],pauVar226[9]);
                        auVar1259 = vunpckhps_avx(pauVar226[10],pauVar226[0xb]);
                        auVar1075 = vunpcklpd_avx(auVar413,auVar1076);
                        auVar413 = vunpckhpd_avx(auVar413,auVar1076);
                        auVar1076 = vunpcklpd_avx(auVar1168,auVar1259);
                        auVar1168 = vunpckhpd_avx(auVar1168,auVar1259);
                        *(undefined1 (*) [16])*pauVar236 = auVar534;
                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar1135;
                        *(undefined1 (*) [16])pauVar236[1] = auVar1075;
                        *(undefined1 (*) [16])(pauVar236[1] + 0x10) = auVar945;
                        *(undefined1 (*) [16])pauVar236[2] = auVar310;
                        *(undefined1 (*) [16])(pauVar236[2] + 0x10) = auVar413;
                        *(undefined1 (*) [16])pauVar236[3] = auVar309;
                        *(undefined1 (*) [16])(pauVar236[3] + 0x10) = auVar1074;
                        *(undefined1 (*) [16])pauVar236[4] = auVar1076;
                        *(undefined1 (*) [16])(pauVar236[4] + 0x10) = auVar268;
                        *(undefined1 (*) [16])pauVar236[5] = auVar668;
                        *(undefined1 (*) [16])(pauVar236[5] + 0x10) = auVar1168;
                        pauVar236 = pauVar236 + 6;
                        pauVar226 = pauVar226 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 1) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  lVar256 * 4 +
                                  uVar210 * 4 + local_920.cstep * (long)iVar192 * local_920.elemsize
                                  );
                      uVar247 = uVar244;
                      while (bVar186 = uVar247 != 0, uVar247 = uVar247 - 1, bVar186) {
                        auVar268 = *(undefined1 (*) [16])pauVar253[1];
                        *pauVar236 = *pauVar253;
                        *(undefined1 (*) [16])pauVar236[1] = auVar268;
                        pauVar236 = (undefined1 (*) [32])(pauVar236[1] + 0x10);
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + local_920.cstep * 4);
                      }
                    }
                    lVar200 = lVar200 + 0x30;
                    lVar208 = lVar208 + 0x30;
                  }
                  for (; (long)uVar210 < lVar234 + -7; uVar210 = uVar210 + 8) {
                    if (local_920.elempack == 8) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x20 +
                                  local_920.cstep * (long)iVar257 * local_920.elemsize);
                      iVar187 = iVar193;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar376 = vunpcklps_avx(*pauVar253,pauVar253[1]);
                        auVar1215 = vunpckhps_avx(*pauVar253,pauVar253[1]);
                        auVar304 = vunpcklps_avx(pauVar253[2],pauVar253[3]);
                        auVar1449 = vunpckhps_avx(pauVar253[2],pauVar253[3]);
                        auVar595 = vunpcklps_avx(pauVar253[4],pauVar253[5]);
                        auVar1485 = vunpckhps_avx(pauVar253[4],pauVar253[5]);
                        auVar1112 = vunpcklps_avx(pauVar253[6],pauVar253[7]);
                        auVar613 = vunpckhps_avx(pauVar253[6],pauVar253[7]);
                        auVar593 = vunpcklpd_avx(auVar376,auVar304);
                        auVar376 = vunpckhpd_avx(auVar376,auVar304);
                        auVar304 = vunpcklpd_avx(auVar1215,auVar1449);
                        auVar1215 = vunpckhpd_avx(auVar1215,auVar1449);
                        auVar594 = vunpcklpd_avx(auVar595,auVar1112);
                        auVar1449 = vunpckhpd_avx(auVar595,auVar1112);
                        auVar595 = vunpcklpd_avx(auVar1485,auVar613);
                        auVar1485 = vunpckhpd_avx(auVar1485,auVar613);
                        auVar893._16_16_ = auVar594._0_16_;
                        auVar893._0_16_ = auVar593._0_16_;
                        auVar1097._16_16_ = auVar1449._0_16_;
                        auVar1097._0_16_ = auVar376._0_16_;
                        auVar1172._16_16_ = auVar595._0_16_;
                        auVar1172._0_16_ = auVar304._0_16_;
                        auVar1265._16_16_ = auVar1485._0_16_;
                        auVar1265._0_16_ = auVar1215._0_16_;
                        auVar613 = vperm2f128_avx(auVar593,auVar594,0x31);
                        auVar376 = vperm2f128_avx(auVar376,auVar1449,0x31);
                        auVar1449 = vperm2f128_avx(auVar304,auVar595,0x31);
                        auVar1215 = vperm2f128_avx(auVar1215,auVar1485,0x31);
                        *pauVar236 = auVar893;
                        pauVar236[1] = auVar1097;
                        pauVar236[2] = auVar1172;
                        pauVar236[3] = auVar1265;
                        pauVar236[4] = auVar613;
                        pauVar236[5] = auVar376;
                        pauVar236[6] = auVar1449;
                        pauVar236[7] = auVar1215;
                        pauVar236 = pauVar236 + 8;
                        pauVar253 = pauVar253 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 4) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x10 +
                                  local_920.cstep * (long)iVar190 * local_920.elemsize);
                      iVar187 = iVar207;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar945 = vpunpckldq_avx(*pauVar226,pauVar226[1]);
                        auVar309 = vpunpckldq_avx(pauVar226[2],pauVar226[3]);
                        auVar268 = vpunpckhdq_avx(*pauVar226,pauVar226[1]);
                        auVar310 = vpunpckhdq_avx(pauVar226[2],pauVar226[3]);
                        auVar534 = vpunpcklqdq_avx(auVar945,auVar309);
                        auVar945 = vpunpckhqdq_avx(auVar945,auVar309);
                        auVar309 = vpunpcklqdq_avx(auVar268,auVar310);
                        auVar268 = vpunpckhqdq_avx(auVar268,auVar310);
                        auVar310 = vunpcklps_avx(pauVar226[4],pauVar226[5]);
                        auVar1259 = vunpcklps_avx(pauVar226[6],pauVar226[7]);
                        auVar668 = vunpckhps_avx(pauVar226[4],pauVar226[5]);
                        auVar413 = vunpckhps_avx(pauVar226[6],pauVar226[7]);
                        auVar1168 = vunpcklpd_avx(auVar310,auVar1259);
                        auVar310 = vunpckhpd_avx(auVar310,auVar1259);
                        auVar1259 = vunpcklpd_avx(auVar668,auVar413);
                        auVar668 = vunpckhpd_avx(auVar668,auVar413);
                        *(undefined1 (*) [16])*pauVar236 = auVar534;
                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar1168;
                        *(undefined1 (*) [16])pauVar236[1] = auVar945;
                        *(undefined1 (*) [16])(pauVar236[1] + 0x10) = auVar310;
                        *(undefined1 (*) [16])pauVar236[2] = auVar309;
                        *(undefined1 (*) [16])(pauVar236[2] + 0x10) = auVar1259;
                        *(undefined1 (*) [16])pauVar236[3] = auVar268;
                        *(undefined1 (*) [16])(pauVar236[3] + 0x10) = auVar668;
                        pauVar236 = pauVar236 + 4;
                        pauVar226 = pauVar226 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 1) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  lVar256 * 4 +
                                  uVar210 * 4 + local_920.cstep * (long)iVar192 * local_920.elemsize
                                  );
                      uVar247 = uVar244;
                      while (bVar186 = uVar247 != 0, uVar247 = uVar247 - 1, bVar186) {
                        *pauVar236 = *pauVar253;
                        pauVar236 = pauVar236 + 1;
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + local_920.cstep * 4);
                      }
                    }
                    lVar200 = lVar200 + 0x20;
                    lVar208 = lVar208 + 0x20;
                  }
                  for (; (long)(uVar210 | 3) < lVar234; uVar210 = uVar210 + 4) {
                    if (local_920.elempack == 8) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x20 +
                                  local_920.cstep * (long)iVar257 * local_920.elemsize);
                      iVar187 = iVar193;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar376 = vunpcklps_avx(*pauVar253,pauVar253[1]);
                        auVar1215 = vunpckhps_avx(*pauVar253,pauVar253[1]);
                        auVar613 = vunpcklps_avx(pauVar253[2],pauVar253[3]);
                        auVar1449 = vunpckhps_avx(pauVar253[2],pauVar253[3]);
                        auVar1485 = vunpcklpd_avx(auVar376,auVar613);
                        auVar376 = vunpckhpd_avx(auVar376,auVar613);
                        auVar613 = vunpcklpd_avx(auVar1215,auVar1449);
                        auVar1215 = vunpckhpd_avx(auVar1215,auVar1449);
                        auVar436._16_16_ = auVar376._0_16_;
                        auVar436._0_16_ = auVar1485._0_16_;
                        auVar805._16_16_ = auVar1215._0_16_;
                        auVar805._0_16_ = auVar613._0_16_;
                        auVar376 = vperm2f128_avx(auVar1485,auVar376,0x31);
                        auVar1215 = vperm2f128_avx(auVar613,auVar1215,0x31);
                        *pauVar236 = auVar436;
                        pauVar236[1] = auVar805;
                        pauVar236[2] = auVar376;
                        pauVar236[3] = auVar1215;
                        pauVar236 = pauVar236 + 4;
                        pauVar253 = pauVar253 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 4) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x10 +
                                  local_920.cstep * (long)iVar190 * local_920.elemsize);
                      iVar187 = iVar207;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar945 = vpunpckldq_avx(*pauVar226,pauVar226[1]);
                        auVar309 = vpunpckldq_avx(pauVar226[2],pauVar226[3]);
                        auVar268 = vpunpckhdq_avx(*pauVar226,pauVar226[1]);
                        auVar310 = vpunpckhdq_avx(pauVar226[2],pauVar226[3]);
                        auVar534 = vpunpcklqdq_avx(auVar945,auVar309);
                        auVar945 = vpunpckhqdq_avx(auVar945,auVar309);
                        auVar309 = vpunpcklqdq_avx(auVar268,auVar310);
                        auVar268 = vpunpckhqdq_avx(auVar268,auVar310);
                        *(undefined1 (*) [16])*pauVar236 = auVar534;
                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar945;
                        *(undefined1 (*) [16])pauVar236[1] = auVar309;
                        *(undefined1 (*) [16])(pauVar236[1] + 0x10) = auVar268;
                        pauVar236 = pauVar236 + 2;
                        pauVar226 = pauVar226 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 1) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  lVar256 * 4 +
                                  uVar210 * 4 + local_920.cstep * (long)iVar192 * local_920.elemsize
                                  );
                      uVar247 = uVar244;
                      while (bVar186 = uVar247 != 0, uVar247 = uVar247 - 1, bVar186) {
                        *(undefined1 (*) [16])*pauVar236 = *pauVar226;
                        pauVar236 = (undefined1 (*) [32])(*pauVar236 + 0x10);
                        pauVar226 = (undefined1 (*) [16])(*pauVar226 + local_920.cstep * 4);
                      }
                    }
                    lVar200 = lVar200 + 0x10;
                    lVar208 = lVar208 + 0x10;
                  }
                  for (; (long)(uVar210 | 1) < lVar234; uVar210 = uVar210 + 2) {
                    if (local_920.elempack == 8) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x20 +
                                  local_920.cstep * (long)iVar257 * local_920.elemsize);
                      iVar187 = iVar193;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar1215 = vunpcklps_avx(*pauVar253,pauVar253[1]);
                        auVar376 = vunpckhps_avx(*pauVar253,pauVar253[1]);
                        auVar357._16_16_ = auVar376._0_16_;
                        auVar357._0_16_ = auVar1215._0_16_;
                        auVar376 = vperm2f128_avx(auVar1215,auVar376,0x31);
                        *pauVar236 = auVar357;
                        pauVar236[1] = auVar376;
                        pauVar236 = pauVar236 + 2;
                        pauVar253 = pauVar253 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 4) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x10 +
                                  local_920.cstep * (long)iVar190 * local_920.elemsize);
                      iVar187 = iVar207;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        auVar310 = vpunpckldq_avx(*pauVar226,pauVar226[1]);
                        auVar268 = vpunpckhdq_avx(*pauVar226,pauVar226[1]);
                        *(undefined1 (*) [16])*pauVar236 = auVar310;
                        *(undefined1 (*) [16])(*pauVar236 + 0x10) = auVar268;
                        pauVar236 = pauVar236 + 1;
                        pauVar226 = pauVar226 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 1) {
                      lVar201 = local_920.cstep * (long)iVar192 * local_920.elemsize;
                      lVar216 = (long)local_920.data + lVar200;
                      uVar247 = uVar244;
                      while (bVar186 = uVar247 != 0, uVar247 = uVar247 - 1, bVar186) {
                        *(undefined4 *)*pauVar236 = *(undefined4 *)(lVar216 + -4 + lVar201);
                        *(undefined4 *)(*pauVar236 + 4) = *(undefined4 *)(lVar216 + lVar201);
                        pauVar236 = (undefined1 (*) [32])(*pauVar236 + 8);
                        lVar216 = lVar216 + local_920.cstep * 4;
                      }
                    }
                    lVar200 = lVar200 + 8;
                    lVar208 = lVar208 + 8;
                  }
                  for (; iVar187 = (int)(float)local_a40, (long)uVar210 < lVar234;
                      uVar210 = uVar210 + 1) {
                    if (local_920.elempack == 8) {
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x20 +
                                  local_920.cstep * (long)iVar257 * local_920.elemsize);
                      iVar187 = iVar193;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        *pauVar236 = *pauVar253;
                        pauVar236 = pauVar236 + 1;
                        pauVar253 = pauVar253 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 4) {
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_920.data +
                                  (uVar210 + lVar256) * 0x10 +
                                  local_920.cstep * (long)iVar190 * local_920.elemsize);
                      iVar187 = iVar207;
                      while (bVar186 = iVar187 != 0, iVar187 = iVar187 + -1, bVar186) {
                        *(undefined1 (*) [16])*pauVar236 = *pauVar226;
                        pauVar236 = (undefined1 (*) [32])(*pauVar236 + 0x10);
                        pauVar226 = pauVar226 + local_920.cstep;
                      }
                    }
                    if (local_920.elempack == 1) {
                      puVar254 = (undefined4 *)
                                 (local_920.cstep * (long)iVar192 * local_920.elemsize + lVar208 +
                                 (long)local_920.data);
                      uVar247 = uVar244;
                      while (bVar186 = uVar247 != 0, uVar247 = uVar247 - 1, bVar186) {
                        *(undefined4 *)*pauVar236 = *puVar254;
                        pauVar236 = (undefined1 (*) [32])(*pauVar236 + 4);
                        puVar254 = puVar254 + local_920.cstep;
                      }
                    }
                    lVar208 = lVar208 + 4;
                  }
                }
                pvVar204 = local_798;
                piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
                if (piVar255 != (int *)0x0) {
                  LOCK();
                  *piVar255 = *piVar255 + -1;
                  UNLOCK();
                  if (*piVar255 == 0) {
                    if (local_8b0 == (Allocator *)0x0) {
                      free((void *)local_8d0);
                    }
                    else {
                      (*local_8b0->_vptr_Allocator[3])();
                    }
                  }
                }
                iVar257 = (int)(float)local_a80 + 1;
              }
              local_890 = 0;
              local_8d0 = (undefined1  [8])0x0;
              fStack_8c8 = 0.0;
              uStack_8c4 = 0;
              local_8c0 = 0;
              uStack_8bf = 0;
              local_8b8 = 0.0;
              local_8b0 = (Allocator *)0x0;
              iStack_8a8 = 0;
              fStack_8a4 = 0.0;
              fStack_8a0 = 0.0;
              iStack_89c = 0;
              iStack_898 = 0;
              if (uVar259 - (uint)local_6b8.data == 0 || (int)uVar259 < (int)(uint)local_6b8.data) {
LAB_001ba0ba:
                local_6d8 = 0;
                iVar187 = (int)local_6c8;
                if ((int)local_6c8 < 1) {
                  iVar187 = 0;
                }
                local_6c8 = CONCAT44(local_6c8._4_4_,iVar187);
                local_840._4_4_ = 0;
                iVar187 = 0;
                local_840._0_4_ = uVar259;
                while (iVar257 = (int)local_810.data, iVar187 != (int)local_6c8) {
                  local_6d0 = CONCAT44(local_6d0._4_4_,iVar187);
                  if ((int)uVar244 < (int)uVar259) {
                    iVar187 = get_omp_thread_num();
                    local_6e0 = (undefined1 (*) [32])
                                ((long)iVar187 * local_890 * CONCAT71(uStack_8bf,local_8c0) +
                                (long)local_8d0);
                  }
                  else {
                    local_6e0 = (undefined1 (*) [32])0x0;
                  }
                  iVar188 = iVar257 * (int)local_6d0;
                  iVar187 = (int)local_670 - iVar188;
                  if (iVar257 < iVar187) {
                    iVar187 = iVar257;
                  }
                  local_790 = CONCAT44(local_790._4_4_,iVar188);
                  lVar208 = (long)iVar188;
                  lVar200 = (long)iVar187;
                  for (iVar187 = 0; iVar257 = (int)local_798 - iVar187,
                      iVar257 != 0 && iVar187 <= (int)local_798;
                      iVar187 = iVar187 + (int)local_738.data) {
                    if ((int)local_738.data < iVar257) {
                      iVar257 = (int)local_738.data;
                    }
                    local_850 = (void *)(long)iVar187;
                    local_858 = (void *)CONCAT44(local_858._4_4_,iVar187);
                    local_928 = (void *)CONCAT44(local_928._4_4_,iVar257);
                    for (iVar239 = 0; uVar247 = uVar259 - iVar239,
                        uVar247 != 0 && iVar239 <= (int)uVar259;
                        iVar239 = iVar239 + (uint)local_6b8.data) {
                      if ((int)uVar244 < (int)uVar247) {
                        uVar247 = uVar244;
                      }
                      local_818 = (ulong)uVar247;
                      pauVar236 = (undefined1 (*) [32])(this->super_Convolution).bias_data.data;
                      sVar13 = (this->weight_sgemm_data).elemsize;
                      pauVar253 = (undefined1 (*) [32])
                                  ((long)(this->weight_sgemm_data).data +
                                  (long)(this->weight_sgemm_data).w * sVar13 *
                                  (long)(iVar239 / (int)uVar244) +
                                  (long)(iVar188 / (int)local_810.data) *
                                  (this->weight_sgemm_data).cstep * sVar13);
                      pauVar226 = (undefined1 (*) [16])
                                  ((long)local_660 +
                                  (long)(int)fStack_634 * (long)uStack_650 *
                                  (long)(iVar239 / (int)uVar244) +
                                  (long)(iVar187 / (int)local_738.data) * local_620 *
                                  (long)uStack_650);
                      iVar189 = uVar244 + iVar239;
                      iVar258 = top_blob->elempack;
                      sVar13 = top_blob->cstep;
                      local_9c8 = (void *)(long)(iVar258 * iVar187);
                      iVar192 = (int)sVar13;
                      iVar249 = iVar192 * 2;
                      lVar215 = (long)(sVar13 * 0x300000000) >> 0x20;
                      local_9c0._0_8_ = lVar215;
                      lVar234 = (long)(iVar192 * 4);
                      lVar202 = (long)(sVar13 * 0x500000000) >> 0x20;
                      local_960._0_8_ = lVar202;
                      lVar217 = (long)(sVar13 * 0x600000000) >> 0x20;
                      local_980._0_8_ = lVar217;
                      lVar203 = (long)(sVar13 * 0x700000000) >> 0x20;
                      local_9a0._0_8_ = lVar203;
                      lVar256 = (long)(iVar192 * 3);
                      local_7c0._0_8_ = lVar256;
                      lVar201 = (long)(iVar192 + 1);
                      local_880._0_8_ = lVar201;
                      local_760 = iVar192 * 2 + 1;
                      iStack_75c = local_760 >> 0x1f;
                      local_780._0_4_ = iVar192 * 3 + 1;
                      local_780._4_4_ = (int)local_780 >> 0x1f;
                      lVar216 = (long)(iVar192 * 6 + 1);
                      local_6f0._0_8_ = lVar216;
                      local_8d8 = (void *)(long)(iVar192 * 7 + 1);
                      uVar210 = 0;
                      if (0 < (int)uVar247) {
                        uVar210 = (ulong)uVar247;
                      }
                      local_788 = (void *)((long)(int)(uVar247 * 8) * 4);
                      lVar219 = uVar210 * 8;
                      local_a40 = uVar210 * 4;
                      local_a60 = uVar210 * 0x30;
                      pauVar245 = local_6e0;
                      for (uVar209 = 0; iVar190 = (int)uVar210, (long)(uVar209 | 7) < lVar200;
                          uVar209 = uVar209 + 8) {
                        pauVar195 = (undefined1 (*) [32])
                                    ((long)top_blob->data +
                                    (long)local_9c8 * 4 + (uVar209 + lVar208) * (long)iVar192 * 4);
                        if (pauVar236 != (undefined1 (*) [32])0x0) {
                          pauVar236 = (undefined1 (*) [32])
                                      ((long)(this->super_Convolution).bias_data.data +
                                      uVar209 * 4 + lVar208 * 4);
                        }
                        pauVar238 = pauVar226;
                        for (uVar244 = 0; (int)(uVar244 + 0xb) < iVar257; uVar244 = uVar244 + 0xc) {
                          uVar229 = uVar210;
                          pauVar260 = pauVar238;
                          pauVar212 = pauVar253;
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                              auVar1379 = ZEXT1664((undefined1  [16])0x0);
                              auVar1452 = ZEXT1664((undefined1  [16])0x0);
                              auVar1488 = ZEXT1664((undefined1  [16])0x0);
                              auVar1506 = ZEXT1664((undefined1  [16])0x0);
                              auVar1059 = ZEXT1664((undefined1  [16])0x0);
                              auVar1129 = ZEXT1664((undefined1  [16])0x0);
                              auVar1217 = ZEXT1664((undefined1  [16])0x0);
                              auVar1304 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar376 = *pauVar236;
                              auVar1060 = ZEXT3264(auVar376);
                              auVar1130 = ZEXT3264(auVar376);
                              auVar1218 = ZEXT3264(auVar376);
                              auVar1305 = ZEXT3264(auVar376);
                              auVar1379 = ZEXT3264(auVar376);
                              auVar1452 = ZEXT3264(auVar376);
                              auVar1488 = ZEXT3264(auVar376);
                              auVar1506 = ZEXT3264(auVar376);
                              auVar1059 = ZEXT3264(auVar376);
                              auVar1129 = ZEXT3264(auVar376);
                              auVar1217 = ZEXT3264(auVar376);
                              auVar1304 = ZEXT3264(auVar376);
                            }
                          }
                          else {
                            auVar1304 = ZEXT3264(*pauVar245);
                            auVar1217 = ZEXT3264(pauVar245[1]);
                            auVar1129 = ZEXT3264(pauVar245[2]);
                            auVar1059 = ZEXT3264(pauVar245[3]);
                            auVar1506 = ZEXT3264(pauVar245[4]);
                            auVar1488 = ZEXT3264(pauVar245[5]);
                            auVar1452 = ZEXT3264(pauVar245[6]);
                            auVar1379 = ZEXT3264(pauVar245[7]);
                            auVar1305 = ZEXT3264(pauVar245[8]);
                            auVar1218 = ZEXT3264(pauVar245[9]);
                            auVar1130 = ZEXT3264(pauVar245[10]);
                            auVar1060 = ZEXT3264(pauVar245[0xb]);
                          }
                          while( true ) {
                            auVar1114 = auVar1304._0_32_;
                            auVar1113 = auVar1217._0_32_;
                            auVar1112 = auVar1129._0_32_;
                            auVar595 = auVar1059._0_32_;
                            auVar594 = auVar1506._0_32_;
                            auVar304 = auVar1488._0_32_;
                            auVar593 = auVar1452._0_32_;
                            auVar613 = auVar1379._0_32_;
                            auVar1485 = auVar1305._0_32_;
                            auVar1449 = auVar1218._0_32_;
                            auVar1215 = auVar1130._0_32_;
                            auVar376 = auVar1060._0_32_;
                            if ((int)uVar229 == 0) break;
                            auVar1115 = *pauVar212;
                            uVar211 = *(undefined4 *)*pauVar260;
                            auVar1408._4_4_ = uVar211;
                            auVar1408._0_4_ = uVar211;
                            auVar1408._8_4_ = uVar211;
                            auVar1408._12_4_ = uVar211;
                            auVar1408._16_4_ = uVar211;
                            auVar1408._20_4_ = uVar211;
                            auVar1408._24_4_ = uVar211;
                            auVar1408._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1114,auVar1115,auVar1408);
                            auVar1304 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar260 + 4);
                            auVar1409._4_4_ = uVar211;
                            auVar1409._0_4_ = uVar211;
                            auVar1409._8_4_ = uVar211;
                            auVar1409._12_4_ = uVar211;
                            auVar1409._16_4_ = uVar211;
                            auVar1409._20_4_ = uVar211;
                            auVar1409._24_4_ = uVar211;
                            auVar1409._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1113,auVar1115,auVar1409);
                            auVar1217 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar260 + 8);
                            auVar1410._4_4_ = uVar211;
                            auVar1410._0_4_ = uVar211;
                            auVar1410._8_4_ = uVar211;
                            auVar1410._12_4_ = uVar211;
                            auVar1410._16_4_ = uVar211;
                            auVar1410._20_4_ = uVar211;
                            auVar1410._24_4_ = uVar211;
                            auVar1410._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(*pauVar260 + 0xc);
                            auVar1471._4_4_ = uVar211;
                            auVar1471._0_4_ = uVar211;
                            auVar1471._8_4_ = uVar211;
                            auVar1471._12_4_ = uVar211;
                            auVar1471._16_4_ = uVar211;
                            auVar1471._20_4_ = uVar211;
                            auVar1471._24_4_ = uVar211;
                            auVar1471._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1112,auVar1115,auVar1410);
                            auVar1129 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar595,auVar1115,auVar1471);
                            auVar1059 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)pauVar260[1];
                            auVar1411._4_4_ = uVar211;
                            auVar1411._0_4_ = uVar211;
                            auVar1411._8_4_ = uVar211;
                            auVar1411._12_4_ = uVar211;
                            auVar1411._16_4_ = uVar211;
                            auVar1411._20_4_ = uVar211;
                            auVar1411._24_4_ = uVar211;
                            auVar1411._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar594,auVar1115,auVar1411);
                            auVar1506 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[1] + 4);
                            auVar1412._4_4_ = uVar211;
                            auVar1412._0_4_ = uVar211;
                            auVar1412._8_4_ = uVar211;
                            auVar1412._12_4_ = uVar211;
                            auVar1412._16_4_ = uVar211;
                            auVar1412._20_4_ = uVar211;
                            auVar1412._24_4_ = uVar211;
                            auVar1412._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar304,auVar1115,auVar1412);
                            auVar1488 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[1] + 8);
                            auVar1413._4_4_ = uVar211;
                            auVar1413._0_4_ = uVar211;
                            auVar1413._8_4_ = uVar211;
                            auVar1413._12_4_ = uVar211;
                            auVar1413._16_4_ = uVar211;
                            auVar1413._20_4_ = uVar211;
                            auVar1413._24_4_ = uVar211;
                            auVar1413._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(pauVar260[1] + 0xc);
                            auVar1472._4_4_ = uVar211;
                            auVar1472._0_4_ = uVar211;
                            auVar1472._8_4_ = uVar211;
                            auVar1472._12_4_ = uVar211;
                            auVar1472._16_4_ = uVar211;
                            auVar1472._20_4_ = uVar211;
                            auVar1472._24_4_ = uVar211;
                            auVar1472._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar593,auVar1115,auVar1413);
                            auVar1452 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar613,auVar1115,auVar1472);
                            auVar1379 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)pauVar260[2];
                            auVar1414._4_4_ = uVar211;
                            auVar1414._0_4_ = uVar211;
                            auVar1414._8_4_ = uVar211;
                            auVar1414._12_4_ = uVar211;
                            auVar1414._16_4_ = uVar211;
                            auVar1414._20_4_ = uVar211;
                            auVar1414._24_4_ = uVar211;
                            auVar1414._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1485,auVar1115,auVar1414);
                            auVar1305 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[2] + 4);
                            auVar1415._4_4_ = uVar211;
                            auVar1415._0_4_ = uVar211;
                            auVar1415._8_4_ = uVar211;
                            auVar1415._12_4_ = uVar211;
                            auVar1415._16_4_ = uVar211;
                            auVar1415._20_4_ = uVar211;
                            auVar1415._24_4_ = uVar211;
                            auVar1415._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1449,auVar1115,auVar1415);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[2] + 8);
                            auVar1416._4_4_ = uVar211;
                            auVar1416._0_4_ = uVar211;
                            auVar1416._8_4_ = uVar211;
                            auVar1416._12_4_ = uVar211;
                            auVar1416._16_4_ = uVar211;
                            auVar1416._20_4_ = uVar211;
                            auVar1416._24_4_ = uVar211;
                            auVar1416._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(pauVar260[2] + 0xc);
                            auVar1473._4_4_ = uVar211;
                            auVar1473._0_4_ = uVar211;
                            auVar1473._8_4_ = uVar211;
                            auVar1473._12_4_ = uVar211;
                            auVar1473._16_4_ = uVar211;
                            auVar1473._20_4_ = uVar211;
                            auVar1473._24_4_ = uVar211;
                            auVar1473._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1215,auVar1115,auVar1416);
                            auVar1130 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar376,auVar1115,auVar1473);
                            auVar1060 = ZEXT1664(auVar268);
                            uVar229 = (ulong)((int)uVar229 - 1);
                            pauVar260 = pauVar260 + 3;
                            pauVar212 = pauVar212 + 1;
                          }
                          if (iVar189 < (int)uVar259) {
                            *pauVar245 = auVar1114;
                            pauVar245[1] = auVar1113;
                            pauVar245[2] = auVar1112;
                            pauVar245[3] = auVar595;
                            pauVar245[4] = auVar594;
                            pauVar245[5] = auVar304;
                            pauVar245[6] = auVar593;
                            pauVar245[7] = auVar613;
                            pauVar245[8] = auVar1485;
                            pauVar245[9] = auVar1449;
                            pauVar245[10] = auVar1215;
                            pauVar245[0xb] = auVar376;
                          }
                          else {
                            auVar309 = auVar1305._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar268 = auVar1060._0_16_;
                            if (iVar258 == 1) {
                              auVar376 = vunpcklps_avx(auVar1114,auVar1113);
                              auVar1215 = vunpckhps_avx(auVar1114,auVar1113);
                              auVar1113 = vunpcklps_avx(auVar1112,auVar595);
                              auVar1449 = vunpckhps_avx(auVar1112,auVar595);
                              auVar595 = vunpcklps_avx(auVar594,auVar304);
                              auVar1485 = vunpckhps_avx(auVar594,auVar304);
                              auVar1112 = vunpcklps_avx(auVar593,auVar613);
                              auVar613 = vunpckhps_avx(auVar593,auVar613);
                              auVar593 = vunpcklpd_avx(auVar376,auVar1113);
                              auVar376 = vunpckhpd_avx(auVar376,auVar1113);
                              auVar304 = vunpcklpd_avx(auVar1215,auVar1449);
                              auVar1215 = vunpckhpd_avx(auVar1215,auVar1449);
                              auVar594 = vunpcklpd_avx(auVar595,auVar1112);
                              auVar1449 = vunpckhpd_avx(auVar595,auVar1112);
                              auVar595 = vunpcklpd_avx(auVar1485,auVar613);
                              auVar1485 = vunpckhpd_avx(auVar1485,auVar613);
                              auVar894._16_16_ = auVar594._0_16_;
                              auVar894._0_16_ = auVar593._0_16_;
                              auVar1417._16_16_ = auVar1449._0_16_;
                              auVar1417._0_16_ = auVar376._0_16_;
                              auVar1474._16_16_ = auVar595._0_16_;
                              auVar1474._0_16_ = auVar304._0_16_;
                              auVar1496._16_16_ = auVar1485._0_16_;
                              auVar1496._0_16_ = auVar1215._0_16_;
                              auVar613 = vperm2f128_avx(auVar593,auVar594,0x31);
                              auVar376 = vperm2f128_avx(auVar376,auVar1449,0x31);
                              auVar1449 = vperm2f128_avx(auVar304,auVar595,0x31);
                              auVar1215 = vperm2f128_avx(auVar1215,auVar1485,0x31);
                              *pauVar195 = auVar894;
                              *(undefined1 (*) [32])(*pauVar195 + (long)iVar192 * 4) = auVar1417;
                              *(undefined1 (*) [32])(*pauVar195 + (long)iVar249 * 4) = auVar1474;
                              *(undefined1 (*) [32])(*pauVar195 + lVar215 * 4) = auVar1496;
                              *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar613;
                              *(undefined1 (*) [32])(*pauVar195 + lVar202 * 4) = auVar376;
                              *(undefined1 (*) [32])(*pauVar195 + lVar217 * 4) = auVar1449;
                              *(undefined1 (*) [32])(*pauVar195 + lVar203 * 4) = auVar1215;
                              auVar534 = vunpcklps_avx(auVar309,auVar945);
                              auVar668 = vunpcklps_avx(auVar310,auVar268);
                              auVar945 = vunpckhps_avx(auVar309,auVar945);
                              auVar309 = vunpckhps_avx(auVar310,auVar268);
                              auVar268 = vmovlhps_avx(auVar534,auVar668);
                              auVar534 = vunpckhpd_avx(auVar534,auVar668);
                              auVar310 = vmovlhps_avx(auVar945,auVar309);
                              auVar668 = vunpckhpd_avx(auVar945,auVar309);
                              auVar309 = vunpcklps_avx(auVar1305._16_16_,auVar1218._16_16_);
                              auVar413 = vunpcklps_avx(auVar1130._16_16_,auVar1060._16_16_);
                              auVar1168 = vunpckhps_avx(auVar1305._16_16_,auVar1218._16_16_);
                              auVar1259 = vunpckhps_avx(auVar1130._16_16_,auVar1060._16_16_);
                              auVar945 = vmovlhps_avx(auVar309,auVar413);
                              auVar413 = vunpckhpd_avx(auVar309,auVar413);
                              auVar309 = vmovlhps_avx(auVar1168,auVar1259);
                              auVar1168 = vunpckhpd_avx(auVar1168,auVar1259);
                              *(undefined1 (*) [16])pauVar195[1] = auVar268;
                              *(undefined1 (*) [16])(pauVar195[1] + (long)iVar192 * 4) = auVar534;
                              *(undefined1 (*) [16])(pauVar195[1] + (long)iVar249 * 4) = auVar310;
                              *(undefined1 (*) [16])(pauVar195[1] + lVar215 * 4) = auVar668;
                              *(undefined1 (*) [16])(pauVar195[1] + lVar234 * 4) = auVar945;
                              *(undefined1 (*) [16])(pauVar195[1] + lVar202 * 4) = auVar413;
                              *(undefined1 (*) [16])(pauVar195[1] + lVar217 * 4) = auVar309;
                              *(undefined1 (*) [16])(pauVar195[1] + lVar203 * 4) = auVar1168;
                              pauVar195 = (undefined1 (*) [32])(pauVar195[1] + 0x10);
                              uVar259 = (uint)local_840;
                            }
                            else if (iVar258 == 4) {
                              auVar1338._16_16_ = auVar1217._0_16_;
                              auVar1338._0_16_ = auVar1304._0_16_;
                              auVar1113 = vperm2f128_avx(auVar1114,auVar1113,0x31);
                              auVar1266._16_16_ = auVar1059._0_16_;
                              auVar1266._0_16_ = auVar1129._0_16_;
                              auVar595 = vperm2f128_avx(auVar1112,auVar595,0x31);
                              auVar1098._16_16_ = auVar1488._0_16_;
                              auVar1098._0_16_ = auVar1506._0_16_;
                              auVar304 = vperm2f128_avx(auVar594,auVar304,0x31);
                              auVar962._16_16_ = auVar1379._0_16_;
                              auVar962._0_16_ = auVar1452._0_16_;
                              auVar613 = vperm2f128_avx(auVar593,auVar613,0x31);
                              auVar806._16_16_ = auVar945;
                              auVar806._0_16_ = auVar309;
                              auVar1449 = vperm2f128_avx(auVar1485,auVar1449,0x31);
                              auVar538._16_16_ = auVar268;
                              auVar538._0_16_ = auVar310;
                              auVar376 = vperm2f128_avx(auVar1215,auVar376,0x31);
                              *pauVar195 = auVar1338;
                              pauVar195[1] = auVar1266;
                              pauVar195[2] = auVar1098;
                              pauVar195[3] = auVar962;
                              pauVar195[4] = auVar806;
                              pauVar195[5] = auVar538;
                              *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar1113;
                              *(undefined1 (*) [32])(pauVar195[1] + lVar234 * 4) = auVar595;
                              *(undefined1 (*) [32])(pauVar195[2] + lVar234 * 4) = auVar304;
                              *(undefined1 (*) [32])(pauVar195[3] + lVar234 * 4) = auVar613;
                              *(undefined1 (*) [32])(pauVar195[4] + lVar234 * 4) = auVar1449;
                              *(undefined1 (*) [32])(pauVar195[5] + lVar234 * 4) = auVar376;
                              pauVar195 = pauVar195 + 6;
                            }
                            else if (iVar258 == 8) {
                              *pauVar195 = auVar1114;
                              pauVar195[1] = auVar1113;
                              pauVar195[2] = auVar1112;
                              pauVar195[3] = auVar595;
                              pauVar195[4] = auVar594;
                              pauVar195[5] = auVar304;
                              pauVar195[6] = auVar593;
                              pauVar195[7] = auVar613;
                              pauVar195[8] = auVar1485;
                              pauVar195[9] = auVar1449;
                              pauVar195[10] = auVar1215;
                              pauVar195[0xb] = auVar376;
                              pauVar195 = pauVar195 + 0xc;
                            }
                          }
                          pauVar238 = pauVar238 + uVar210 * 3;
                          pauVar245 = pauVar245 + 0xc;
                        }
                        for (; (int)(uVar244 + 7) < iVar257; uVar244 = uVar244 + 8) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                              auVar1379 = ZEXT1664((undefined1  [16])0x0);
                              auVar1452 = ZEXT1664((undefined1  [16])0x0);
                              auVar1488 = ZEXT1664((undefined1  [16])0x0);
                              auVar1506 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar376 = *pauVar236;
                              auVar1060 = ZEXT3264(auVar376);
                              auVar1130 = ZEXT3264(auVar376);
                              auVar1218 = ZEXT3264(auVar376);
                              auVar1305 = ZEXT3264(auVar376);
                              auVar1379 = ZEXT3264(auVar376);
                              auVar1452 = ZEXT3264(auVar376);
                              auVar1488 = ZEXT3264(auVar376);
                              auVar1506 = ZEXT3264(auVar376);
                            }
                          }
                          else {
                            auVar1506 = ZEXT3264(*pauVar245);
                            auVar1488 = ZEXT3264(pauVar245[1]);
                            auVar1452 = ZEXT3264(pauVar245[2]);
                            auVar1379 = ZEXT3264(pauVar245[3]);
                            auVar1305 = ZEXT3264(pauVar245[4]);
                            auVar1218 = ZEXT3264(pauVar245[5]);
                            auVar1130 = ZEXT3264(pauVar245[6]);
                            auVar1060 = ZEXT3264(pauVar245[7]);
                          }
                          lVar205 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar190 = (int)uVar229;
                            uVar229 = (ulong)(iVar190 - 1);
                            auVar594 = auVar1506._0_32_;
                            auVar304 = auVar1488._0_32_;
                            auVar593 = auVar1452._0_32_;
                            auVar613 = auVar1379._0_32_;
                            auVar1485 = auVar1305._0_32_;
                            auVar1449 = auVar1218._0_32_;
                            auVar1215 = auVar1130._0_32_;
                            auVar376 = auVar1060._0_32_;
                            if (iVar190 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205);
                            auVar1015._4_4_ = uVar211;
                            auVar1015._0_4_ = uVar211;
                            auVar1015._8_4_ = uVar211;
                            auVar1015._12_4_ = uVar211;
                            auVar1015._16_4_ = uVar211;
                            auVar1015._20_4_ = uVar211;
                            auVar1015._24_4_ = uVar211;
                            auVar1015._28_4_ = uVar211;
                            auVar595 = *(undefined1 (*) [32])(*pauVar253 + lVar205);
                            auVar268 = vfmadd231ps_fma(auVar594,auVar595,auVar1015);
                            auVar1506 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 4);
                            auVar1016._4_4_ = uVar211;
                            auVar1016._0_4_ = uVar211;
                            auVar1016._8_4_ = uVar211;
                            auVar1016._12_4_ = uVar211;
                            auVar1016._16_4_ = uVar211;
                            auVar1016._20_4_ = uVar211;
                            auVar1016._24_4_ = uVar211;
                            auVar1016._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar304,auVar595,auVar1016);
                            auVar1488 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 8);
                            auVar1017._4_4_ = uVar211;
                            auVar1017._0_4_ = uVar211;
                            auVar1017._8_4_ = uVar211;
                            auVar1017._12_4_ = uVar211;
                            auVar1017._16_4_ = uVar211;
                            auVar1017._20_4_ = uVar211;
                            auVar1017._24_4_ = uVar211;
                            auVar1017._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar593,auVar595,auVar1017);
                            auVar1452 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 0xc);
                            auVar1018._4_4_ = uVar211;
                            auVar1018._0_4_ = uVar211;
                            auVar1018._8_4_ = uVar211;
                            auVar1018._12_4_ = uVar211;
                            auVar1018._16_4_ = uVar211;
                            auVar1018._20_4_ = uVar211;
                            auVar1018._24_4_ = uVar211;
                            auVar1018._28_4_ = uVar211;
                            uVar211 = *(undefined4 *)(pauVar238[1] + lVar205);
                            auVar1173._4_4_ = uVar211;
                            auVar1173._0_4_ = uVar211;
                            auVar1173._8_4_ = uVar211;
                            auVar1173._12_4_ = uVar211;
                            auVar1173._16_4_ = uVar211;
                            auVar1173._20_4_ = uVar211;
                            auVar1173._24_4_ = uVar211;
                            auVar1173._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar613,auVar595,auVar1018);
                            auVar1379 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar1485,auVar595,auVar1173);
                            auVar1305 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar238[1] + lVar205 + 4);
                            auVar1019._4_4_ = uVar211;
                            auVar1019._0_4_ = uVar211;
                            auVar1019._8_4_ = uVar211;
                            auVar1019._12_4_ = uVar211;
                            auVar1019._16_4_ = uVar211;
                            auVar1019._20_4_ = uVar211;
                            auVar1019._24_4_ = uVar211;
                            auVar1019._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1449,auVar595,auVar1019);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar238[1] + lVar205 + 8);
                            auVar1020._4_4_ = uVar211;
                            auVar1020._0_4_ = uVar211;
                            auVar1020._8_4_ = uVar211;
                            auVar1020._12_4_ = uVar211;
                            auVar1020._16_4_ = uVar211;
                            auVar1020._20_4_ = uVar211;
                            auVar1020._24_4_ = uVar211;
                            auVar1020._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1215,auVar595,auVar1020);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar238[1] + lVar205 + 0xc);
                            auVar1021._4_4_ = uVar211;
                            auVar1021._0_4_ = uVar211;
                            auVar1021._8_4_ = uVar211;
                            auVar1021._12_4_ = uVar211;
                            auVar1021._16_4_ = uVar211;
                            auVar1021._20_4_ = uVar211;
                            auVar1021._24_4_ = uVar211;
                            auVar1021._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar376,auVar595,auVar1021);
                            auVar1060 = ZEXT1664(auVar268);
                            lVar205 = lVar205 + 0x20;
                          }
                          if (iVar189 < (int)uVar259) {
                            *pauVar245 = auVar594;
                            pauVar245[1] = auVar304;
                            pauVar245[2] = auVar593;
                            pauVar245[3] = auVar613;
                            pauVar245[4] = auVar1485;
                            pauVar245[5] = auVar1449;
                            pauVar245[6] = auVar1215;
                            pauVar245[7] = auVar376;
                          }
                          else if (iVar258 == 1) {
                            auVar595 = vunpcklps_avx(auVar594,auVar304);
                            auVar304 = vunpckhps_avx(auVar594,auVar304);
                            auVar1112 = vunpcklps_avx(auVar593,auVar613);
                            auVar613 = vunpckhps_avx(auVar593,auVar613);
                            auVar1113 = vunpcklps_avx(auVar1485,auVar1449);
                            auVar1485 = vunpckhps_avx(auVar1485,auVar1449);
                            auVar1449 = vunpcklps_avx(auVar1215,auVar376);
                            auVar593 = vunpckhps_avx(auVar1215,auVar376);
                            auVar594 = vunpcklpd_avx(auVar595,auVar1112);
                            auVar376 = vunpckhpd_avx(auVar595,auVar1112);
                            auVar595 = vunpcklpd_avx(auVar304,auVar613);
                            auVar1215 = vunpckhpd_avx(auVar304,auVar613);
                            auVar613 = vunpcklpd_avx(auVar1113,auVar1449);
                            auVar1449 = vunpckhpd_avx(auVar1113,auVar1449);
                            auVar304 = vunpcklpd_avx(auVar1485,auVar593);
                            auVar1485 = vunpckhpd_avx(auVar1485,auVar593);
                            auVar437._16_16_ = auVar613._0_16_;
                            auVar437._0_16_ = auVar594._0_16_;
                            auVar1100._16_16_ = auVar1449._0_16_;
                            auVar1100._0_16_ = auVar376._0_16_;
                            auVar1175._16_16_ = auVar304._0_16_;
                            auVar1175._0_16_ = auVar595._0_16_;
                            auVar1268._16_16_ = auVar1485._0_16_;
                            auVar1268._0_16_ = auVar1215._0_16_;
                            auVar613 = vperm2f128_avx(auVar594,auVar613,0x31);
                            auVar376 = vperm2f128_avx(auVar376,auVar1449,0x31);
                            auVar1449 = vperm2f128_avx(auVar595,auVar304,0x31);
                            auVar1215 = vperm2f128_avx(auVar1215,auVar1485,0x31);
                            *pauVar195 = auVar437;
                            *(undefined1 (*) [32])(*pauVar195 + (long)iVar192 * 4) = auVar1100;
                            *(undefined1 (*) [32])(*pauVar195 + (long)iVar249 * 4) = auVar1175;
                            *(undefined1 (*) [32])(*pauVar195 + lVar215 * 4) = auVar1268;
                            *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar613;
                            *(undefined1 (*) [32])(*pauVar195 + lVar202 * 4) = auVar376;
                            *(undefined1 (*) [32])(*pauVar195 + lVar217 * 4) = auVar1449;
                            *(undefined1 (*) [32])(*pauVar195 + lVar203 * 4) = auVar1215;
                            pauVar195 = pauVar195 + 1;
                          }
                          else if (iVar258 == 4) {
                            auVar1022._16_16_ = auVar1488._0_16_;
                            auVar1022._0_16_ = auVar1506._0_16_;
                            auVar1099._16_16_ = auVar1379._0_16_;
                            auVar1099._0_16_ = auVar1452._0_16_;
                            auVar1174._16_16_ = auVar1218._0_16_;
                            auVar1174._0_16_ = auVar1305._0_16_;
                            auVar1267._16_16_ = auVar1060._0_16_;
                            auVar1267._0_16_ = auVar1130._0_16_;
                            auVar304 = vperm2f128_avx(auVar594,auVar304,0x31);
                            auVar613 = vperm2f128_avx(auVar593,auVar613,0x31);
                            auVar1449 = vperm2f128_avx(auVar1485,auVar1449,0x31);
                            auVar376 = vperm2f128_avx(auVar1215,auVar376,0x31);
                            *pauVar195 = auVar1022;
                            pauVar195[1] = auVar1099;
                            pauVar195[2] = auVar1174;
                            pauVar195[3] = auVar1267;
                            *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar304;
                            *(undefined1 (*) [32])(pauVar195[1] + lVar234 * 4) = auVar613;
                            *(undefined1 (*) [32])(pauVar195[2] + lVar234 * 4) = auVar1449;
                            *(undefined1 (*) [32])(pauVar195[3] + lVar234 * 4) = auVar376;
                            pauVar195 = pauVar195 + 4;
                          }
                          else if (iVar258 == 8) {
                            *pauVar195 = auVar594;
                            pauVar195[1] = auVar304;
                            pauVar195[2] = auVar593;
                            pauVar195[3] = auVar613;
                            pauVar195[4] = auVar1485;
                            pauVar195[5] = auVar1449;
                            pauVar195[6] = auVar1215;
                            pauVar195[7] = auVar376;
                            pauVar195 = pauVar195 + 8;
                          }
                          pauVar238 = pauVar238 + uVar210 * 2;
                          pauVar245 = pauVar245 + 8;
                        }
                        for (; (int)(uVar244 | 3) < iVar257; uVar244 = uVar244 + 4) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar376 = *pauVar236;
                              auVar1060 = ZEXT3264(auVar376);
                              auVar1130 = ZEXT3264(auVar376);
                              auVar1218 = ZEXT3264(auVar376);
                              auVar1305 = ZEXT3264(auVar376);
                            }
                          }
                          else {
                            auVar1305 = ZEXT3264(*pauVar245);
                            auVar1218 = ZEXT3264(pauVar245[1]);
                            auVar1130 = ZEXT3264(pauVar245[2]);
                            auVar1060 = ZEXT3264(pauVar245[3]);
                          }
                          lVar205 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar190 = (int)uVar229;
                            uVar229 = (ulong)(iVar190 - 1);
                            auVar1485 = auVar1305._0_32_;
                            auVar1449 = auVar1218._0_32_;
                            auVar1215 = auVar1130._0_32_;
                            auVar376 = auVar1060._0_32_;
                            if (iVar190 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205);
                            auVar673._4_4_ = uVar211;
                            auVar673._0_4_ = uVar211;
                            auVar673._8_4_ = uVar211;
                            auVar673._12_4_ = uVar211;
                            auVar673._16_4_ = uVar211;
                            auVar673._20_4_ = uVar211;
                            auVar673._24_4_ = uVar211;
                            auVar673._28_4_ = uVar211;
                            auVar613 = *(undefined1 (*) [32])(*pauVar253 + lVar205 * 2);
                            auVar268 = vfmadd231ps_fma(auVar1485,auVar613,auVar673);
                            auVar1305 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 4);
                            auVar674._4_4_ = uVar211;
                            auVar674._0_4_ = uVar211;
                            auVar674._8_4_ = uVar211;
                            auVar674._12_4_ = uVar211;
                            auVar674._16_4_ = uVar211;
                            auVar674._20_4_ = uVar211;
                            auVar674._24_4_ = uVar211;
                            auVar674._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1449,auVar613,auVar674);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 8);
                            auVar675._4_4_ = uVar211;
                            auVar675._0_4_ = uVar211;
                            auVar675._8_4_ = uVar211;
                            auVar675._12_4_ = uVar211;
                            auVar675._16_4_ = uVar211;
                            auVar675._20_4_ = uVar211;
                            auVar675._24_4_ = uVar211;
                            auVar675._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1215,auVar613,auVar675);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 0xc);
                            auVar676._4_4_ = uVar211;
                            auVar676._0_4_ = uVar211;
                            auVar676._8_4_ = uVar211;
                            auVar676._12_4_ = uVar211;
                            auVar676._16_4_ = uVar211;
                            auVar676._20_4_ = uVar211;
                            auVar676._24_4_ = uVar211;
                            auVar676._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar376,auVar613,auVar676);
                            auVar1060 = ZEXT1664(auVar268);
                            lVar205 = lVar205 + 0x10;
                          }
                          if (iVar189 < (int)uVar259) {
                            *pauVar245 = auVar1485;
                            pauVar245[1] = auVar1449;
                            pauVar245[2] = auVar1215;
                            pauVar245[3] = auVar376;
                          }
                          else {
                            auVar309 = auVar1305._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar268 = auVar1060._0_16_;
                            if (iVar258 == 1) {
                              auVar534 = vunpcklps_avx(auVar309,auVar945);
                              auVar668 = vunpcklps_avx(auVar310,auVar268);
                              auVar945 = vunpckhps_avx(auVar309,auVar945);
                              auVar309 = vunpckhps_avx(auVar310,auVar268);
                              auVar268 = vmovlhps_avx(auVar534,auVar668);
                              auVar534 = vunpckhpd_avx(auVar534,auVar668);
                              auVar310 = vmovlhps_avx(auVar945,auVar309);
                              auVar668 = vunpckhpd_avx(auVar945,auVar309);
                              auVar309 = vunpcklps_avx(auVar1305._16_16_,auVar1218._16_16_);
                              auVar413 = vunpcklps_avx(auVar1130._16_16_,auVar1060._16_16_);
                              auVar1168 = vunpckhps_avx(auVar1305._16_16_,auVar1218._16_16_);
                              auVar1259 = vunpckhps_avx(auVar1130._16_16_,auVar1060._16_16_);
                              auVar945 = vmovlhps_avx(auVar309,auVar413);
                              auVar413 = vunpckhpd_avx(auVar309,auVar413);
                              auVar309 = vmovlhps_avx(auVar1168,auVar1259);
                              auVar1168 = vunpckhpd_avx(auVar1168,auVar1259);
                              *(undefined1 (*) [16])*pauVar195 = auVar268;
                              *(undefined1 (*) [16])(*pauVar195 + (long)iVar192 * 4) = auVar534;
                              *(undefined1 (*) [16])(*pauVar195 + (long)iVar249 * 4) = auVar310;
                              *(undefined1 (*) [16])(*pauVar195 + lVar215 * 4) = auVar668;
                              *(undefined1 (*) [16])(*pauVar195 + lVar234 * 4) = auVar945;
                              *(undefined1 (*) [16])(*pauVar195 + lVar202 * 4) = auVar413;
                              *(undefined1 (*) [16])(*pauVar195 + lVar217 * 4) = auVar309;
                              *(undefined1 (*) [16])(*pauVar195 + lVar203 * 4) = auVar1168;
                              pauVar195 = (undefined1 (*) [32])(*pauVar195 + 0x10);
                            }
                            else if (iVar258 == 4) {
                              auVar677._16_16_ = auVar945;
                              auVar677._0_16_ = auVar309;
                              auVar807._16_16_ = auVar268;
                              auVar807._0_16_ = auVar310;
                              auVar1449 = vperm2f128_avx(auVar1485,auVar1449,0x31);
                              auVar376 = vperm2f128_avx(auVar1215,auVar376,0x31);
                              *pauVar195 = auVar677;
                              pauVar195[1] = auVar807;
                              *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar1449;
                              *(undefined1 (*) [32])(pauVar195[1] + lVar234 * 4) = auVar376;
                              pauVar195 = pauVar195 + 2;
                            }
                            else if (iVar258 == 8) {
                              *pauVar195 = auVar1485;
                              pauVar195[1] = auVar1449;
                              pauVar195[2] = auVar1215;
                              pauVar195[3] = auVar376;
                              pauVar195 = pauVar195 + 4;
                            }
                          }
                          pauVar238 = pauVar238 + uVar210;
                          pauVar245 = pauVar245 + 4;
                        }
                        for (; (int)(uVar244 | 1) < iVar257; uVar244 = uVar244 + 2) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar1060 = ZEXT3264(*pauVar236);
                              auVar1130 = ZEXT3264(*pauVar236);
                            }
                          }
                          else {
                            auVar1130 = ZEXT3264(*pauVar245);
                            auVar1060 = ZEXT3264(pauVar245[1]);
                          }
                          lVar205 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar190 = (int)uVar229;
                            uVar229 = (ulong)(iVar190 - 1);
                            auVar1215 = auVar1130._0_32_;
                            auVar376 = auVar1060._0_32_;
                            if (iVar190 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205);
                            auVar539._4_4_ = uVar211;
                            auVar539._0_4_ = uVar211;
                            auVar539._8_4_ = uVar211;
                            auVar539._12_4_ = uVar211;
                            auVar539._16_4_ = uVar211;
                            auVar539._20_4_ = uVar211;
                            auVar539._24_4_ = uVar211;
                            auVar539._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar1215,
                                                       *(undefined1 (*) [32])
                                                        (*pauVar253 + lVar205 * 4),auVar539);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205 + 4);
                            auVar540._4_4_ = uVar211;
                            auVar540._0_4_ = uVar211;
                            auVar540._8_4_ = uVar211;
                            auVar540._12_4_ = uVar211;
                            auVar540._16_4_ = uVar211;
                            auVar540._20_4_ = uVar211;
                            auVar540._24_4_ = uVar211;
                            auVar540._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar376,*(undefined1 (*) [32])
                                                                 (*pauVar253 + lVar205 * 4),auVar540
                                                      );
                            auVar1060 = ZEXT1664(auVar268);
                            lVar205 = lVar205 + 8;
                          }
                          if (iVar189 < (int)uVar259) {
                            *pauVar245 = auVar1215;
                            pauVar245[1] = auVar376;
                          }
                          else {
                            auVar945 = auVar1130._16_16_;
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            if (iVar258 == 1) {
                              *(int *)*pauVar195 = auVar1130._0_4_;
                              uVar211 = vextractps_avx(auVar310,1);
                              *(undefined4 *)(*pauVar195 + (long)iVar192 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar310,2);
                              *(undefined4 *)(*pauVar195 + (long)iVar249 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar310,3);
                              *(undefined4 *)(*pauVar195 + lVar256 * 4) = uVar211;
                              *(int *)(*pauVar195 + lVar234 * 4) = auVar1130._16_4_;
                              uVar211 = vextractps_avx(auVar945,1);
                              *(undefined4 *)(*pauVar195 + (long)(iVar192 * 5) * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar945,2);
                              *(undefined4 *)(*pauVar195 + (long)(iVar192 * 6) * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar945,3);
                              *(undefined4 *)(*pauVar195 + (long)(iVar192 * 7) * 4) = uVar211;
                              *(int *)(*pauVar195 + 4) = auVar1060._0_4_;
                              uVar211 = vextractps_avx(auVar268,1);
                              *(undefined4 *)(*pauVar195 + lVar201 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,2);
                              *(undefined4 *)(*pauVar195 + (long)local_760 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,3);
                              *(undefined4 *)(*pauVar195 + (long)(int)local_780 * 4) = uVar211;
                              auVar268 = auVar1060._16_16_;
                              *(int *)(*pauVar195 + (long)(iVar192 * 4 + 1) * 4) = auVar1060._16_4_;
                              uVar211 = vextractps_avx(auVar268,1);
                              *(undefined4 *)(*pauVar195 + (long)(iVar192 * 5 + 1) * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,2);
                              *(undefined4 *)(*pauVar195 + lVar216 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,3);
                              *(undefined4 *)(*pauVar195 + (long)local_8d8 * 4) = uVar211;
                              pauVar195 = (undefined1 (*) [32])(*pauVar195 + 8);
                            }
                            else if (iVar258 == 4) {
                              auVar438._16_16_ = auVar268;
                              auVar438._0_16_ = auVar310;
                              auVar376 = vperm2f128_avx(auVar1215,auVar376,0x31);
                              *pauVar195 = auVar438;
                              *(undefined1 (*) [32])(*pauVar195 + lVar234 * 4) = auVar376;
                              pauVar195 = pauVar195 + 1;
                            }
                            else if (iVar258 == 8) {
                              *pauVar195 = auVar1215;
                              pauVar195[1] = auVar376;
                              pauVar195 = pauVar195 + 2;
                            }
                          }
                          pauVar238 = (undefined1 (*) [16])(*pauVar238 + lVar219);
                          pauVar245 = pauVar245 + 2;
                        }
                        for (; (int)uVar244 < iVar257; uVar244 = uVar244 + 1) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar1060 = ZEXT3264(*pauVar236);
                            }
                          }
                          else {
                            auVar1060 = ZEXT3264(*pauVar245);
                          }
                          lVar205 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar190 = (int)uVar229;
                            uVar229 = (ulong)(iVar190 - 1);
                            auVar376 = auVar1060._0_32_;
                            if (iVar190 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar238 + lVar205);
                            auVar358._4_4_ = uVar211;
                            auVar358._0_4_ = uVar211;
                            auVar358._8_4_ = uVar211;
                            auVar358._12_4_ = uVar211;
                            auVar358._16_4_ = uVar211;
                            auVar358._20_4_ = uVar211;
                            auVar358._24_4_ = uVar211;
                            auVar358._28_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar376,auVar358,
                                                       *(undefined1 (*) [32])
                                                        (*pauVar253 + lVar205 * 8));
                            auVar1060 = ZEXT1664(auVar268);
                            lVar205 = lVar205 + 4;
                          }
                          if (iVar189 < (int)uVar259) {
                            *pauVar245 = auVar376;
                          }
                          else {
                            auVar310 = auVar1060._16_16_;
                            auVar268 = auVar1060._0_16_;
                            if (iVar258 == 1) {
                              *(int *)*pauVar195 = auVar1060._0_4_;
                              uVar211 = vextractps_avx(auVar268,1);
                              *(undefined4 *)(*pauVar195 + (long)iVar192 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,2);
                              *(undefined4 *)(*pauVar195 + (long)iVar249 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar268,3);
                              *(undefined4 *)(*pauVar195 + lVar215 * 4) = uVar211;
                              *(int *)(*pauVar195 + lVar234 * 4) = auVar1060._16_4_;
                              uVar211 = vextractps_avx(auVar310,1);
                              *(undefined4 *)(*pauVar195 + lVar202 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar310,2);
                              *(undefined4 *)(*pauVar195 + lVar217 * 4) = uVar211;
                              uVar211 = vextractps_avx(auVar310,3);
                              *(undefined4 *)(*pauVar195 + lVar203 * 4) = uVar211;
                              pauVar195 = (undefined1 (*) [32])(*pauVar195 + 4);
                            }
                            else if (iVar258 == 4) {
                              *(undefined1 (*) [16])*pauVar195 = auVar268;
                              *(undefined1 (*) [16])(*pauVar195 + lVar234 * 4) = auVar310;
                              pauVar195 = (undefined1 (*) [32])(*pauVar195 + 0x10);
                            }
                            else if (iVar258 == 8) {
                              *pauVar195 = auVar376;
                              pauVar195 = pauVar195 + 1;
                            }
                          }
                          pauVar238 = (undefined1 (*) [16])(*pauVar238 + local_a40);
                          pauVar245 = pauVar245 + 1;
                        }
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + (long)local_788);
                      }
                      local_a00._0_8_ = (long)(int)(uVar247 * 4) * 4;
                      for (; (long)(uVar209 | 3) < lVar200; uVar209 = uVar209 + 4) {
                        pauVar238 = (undefined1 (*) [16])
                                    ((long)top_blob->data +
                                    (long)local_9c8 * 4 + (uVar209 + lVar208) * (long)iVar192 * 4);
                        if (pauVar236 != (undefined1 (*) [32])0x0) {
                          pauVar236 = (undefined1 (*) [32])
                                      ((long)(this->super_Convolution).bias_data.data +
                                      uVar209 * 4 + lVar208 * 4);
                        }
                        pauVar260 = pauVar226;
                        for (uVar244 = 0; (int)(uVar244 + 0xb) < iVar257; uVar244 = uVar244 + 0xc) {
                          uVar229 = uVar210;
                          pauVar240 = pauVar260;
                          pauVar195 = pauVar253;
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                              auVar1379 = ZEXT1664((undefined1  [16])0x0);
                              auVar1452 = ZEXT1664((undefined1  [16])0x0);
                              auVar1488 = ZEXT1664((undefined1  [16])0x0);
                              auVar1506 = ZEXT1664((undefined1  [16])0x0);
                              auVar1059 = ZEXT1664((undefined1  [16])0x0);
                              auVar1129 = ZEXT1664((undefined1  [16])0x0);
                              auVar1217 = ZEXT1664((undefined1  [16])0x0);
                              auVar1304 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar268 = *(undefined1 (*) [16])*pauVar236;
                              auVar1060 = ZEXT1664(auVar268);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar1218 = ZEXT1664(auVar268);
                              auVar1305 = ZEXT1664(auVar268);
                              auVar1379 = ZEXT1664(auVar268);
                              auVar1452 = ZEXT1664(auVar268);
                              auVar1488 = ZEXT1664(auVar268);
                              auVar1506 = ZEXT1664(auVar268);
                              auVar1059 = ZEXT1664(auVar268);
                              auVar1129 = ZEXT1664(auVar268);
                              auVar1217 = ZEXT1664(auVar268);
                              auVar1304 = ZEXT1664(auVar268);
                            }
                          }
                          else {
                            auVar1304 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1217 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                            auVar1129 = ZEXT1664(*(undefined1 (*) [16])pauVar245[1]);
                            auVar1059 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[1] + 0x10));
                            auVar1506 = ZEXT1664(*(undefined1 (*) [16])pauVar245[2]);
                            auVar1488 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[2] + 0x10));
                            auVar1452 = ZEXT1664(*(undefined1 (*) [16])pauVar245[3]);
                            auVar1379 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[3] + 0x10));
                            auVar1305 = ZEXT1664(*(undefined1 (*) [16])pauVar245[4]);
                            auVar1218 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[4] + 0x10));
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])pauVar245[5]);
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[5] + 0x10));
                          }
                          while( true ) {
                            auVar1075 = auVar1304._0_16_;
                            auVar1074 = auVar1217._0_16_;
                            auVar1135 = auVar1129._0_16_;
                            auVar1259 = auVar1059._0_16_;
                            auVar1168 = auVar1506._0_16_;
                            auVar413 = auVar1488._0_16_;
                            auVar668 = auVar1452._0_16_;
                            auVar534 = auVar1379._0_16_;
                            auVar309 = auVar1305._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar268 = auVar1060._0_16_;
                            if ((int)uVar229 == 0) break;
                            auVar1076 = *(undefined1 (*) [16])*pauVar195;
                            uVar211 = *(undefined4 *)*pauVar240;
                            auVar1380._4_4_ = uVar211;
                            auVar1380._0_4_ = uVar211;
                            auVar1380._8_4_ = uVar211;
                            auVar1380._12_4_ = uVar211;
                            auVar1075 = vfmadd231ps_fma(auVar1075,auVar1076,auVar1380);
                            auVar1304 = ZEXT1664(auVar1075);
                            uVar211 = *(undefined4 *)(*pauVar240 + 4);
                            auVar1381._4_4_ = uVar211;
                            auVar1381._0_4_ = uVar211;
                            auVar1381._8_4_ = uVar211;
                            auVar1381._12_4_ = uVar211;
                            auVar1074 = vfmadd231ps_fma(auVar1074,auVar1076,auVar1381);
                            auVar1217 = ZEXT1664(auVar1074);
                            uVar211 = *(undefined4 *)(*pauVar240 + 8);
                            auVar1382._4_4_ = uVar211;
                            auVar1382._0_4_ = uVar211;
                            auVar1382._8_4_ = uVar211;
                            auVar1382._12_4_ = uVar211;
                            auVar1135 = vfmadd231ps_fma(auVar1135,auVar1076,auVar1382);
                            auVar1129 = ZEXT1664(auVar1135);
                            uVar211 = *(undefined4 *)(*pauVar240 + 0xc);
                            auVar1383._4_4_ = uVar211;
                            auVar1383._0_4_ = uVar211;
                            auVar1383._8_4_ = uVar211;
                            auVar1383._12_4_ = uVar211;
                            auVar1259 = vfmadd231ps_fma(auVar1259,auVar1076,auVar1383);
                            auVar1059 = ZEXT1664(auVar1259);
                            uVar211 = *(undefined4 *)pauVar240[1];
                            auVar1384._4_4_ = uVar211;
                            auVar1384._0_4_ = uVar211;
                            auVar1384._8_4_ = uVar211;
                            auVar1384._12_4_ = uVar211;
                            auVar1168 = vfmadd231ps_fma(auVar1168,auVar1076,auVar1384);
                            auVar1506 = ZEXT1664(auVar1168);
                            uVar211 = *(undefined4 *)(pauVar240[1] + 4);
                            auVar1385._4_4_ = uVar211;
                            auVar1385._0_4_ = uVar211;
                            auVar1385._8_4_ = uVar211;
                            auVar1385._12_4_ = uVar211;
                            auVar413 = vfmadd231ps_fma(auVar413,auVar1076,auVar1385);
                            auVar1488 = ZEXT1664(auVar413);
                            uVar211 = *(undefined4 *)(pauVar240[1] + 8);
                            auVar1386._4_4_ = uVar211;
                            auVar1386._0_4_ = uVar211;
                            auVar1386._8_4_ = uVar211;
                            auVar1386._12_4_ = uVar211;
                            auVar668 = vfmadd231ps_fma(auVar668,auVar1076,auVar1386);
                            auVar1452 = ZEXT1664(auVar668);
                            uVar211 = *(undefined4 *)(pauVar240[1] + 0xc);
                            auVar1387._4_4_ = uVar211;
                            auVar1387._0_4_ = uVar211;
                            auVar1387._8_4_ = uVar211;
                            auVar1387._12_4_ = uVar211;
                            auVar534 = vfmadd231ps_fma(auVar534,auVar1076,auVar1387);
                            auVar1379 = ZEXT1664(auVar534);
                            uVar211 = *(undefined4 *)pauVar240[2];
                            auVar1388._4_4_ = uVar211;
                            auVar1388._0_4_ = uVar211;
                            auVar1388._8_4_ = uVar211;
                            auVar1388._12_4_ = uVar211;
                            auVar309 = vfmadd231ps_fma(auVar309,auVar1076,auVar1388);
                            auVar1305 = ZEXT1664(auVar309);
                            uVar211 = *(undefined4 *)(pauVar240[2] + 4);
                            auVar1389._4_4_ = uVar211;
                            auVar1389._0_4_ = uVar211;
                            auVar1389._8_4_ = uVar211;
                            auVar1389._12_4_ = uVar211;
                            auVar945 = vfmadd231ps_fma(auVar945,auVar1076,auVar1389);
                            auVar1218 = ZEXT1664(auVar945);
                            uVar211 = *(undefined4 *)(pauVar240[2] + 8);
                            auVar1390._4_4_ = uVar211;
                            auVar1390._0_4_ = uVar211;
                            auVar1390._8_4_ = uVar211;
                            auVar1390._12_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(auVar310,auVar1076,auVar1390);
                            auVar1130 = ZEXT1664(auVar310);
                            uVar211 = *(undefined4 *)(pauVar240[2] + 0xc);
                            auVar1391._4_4_ = uVar211;
                            auVar1391._0_4_ = uVar211;
                            auVar1391._8_4_ = uVar211;
                            auVar1391._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar1076,auVar1391);
                            auVar1060 = ZEXT1664(auVar268);
                            uVar229 = (ulong)((int)uVar229 - 1);
                            pauVar240 = pauVar240 + 3;
                            pauVar195 = (undefined1 (*) [32])(*pauVar195 + 0x10);
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar1075;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar1074;
                            *(undefined1 (*) [16])pauVar245[1] = auVar1135;
                            *(undefined1 (*) [16])(pauVar245[1] + 0x10) = auVar1259;
                            *(undefined1 (*) [16])pauVar245[2] = auVar1168;
                            *(undefined1 (*) [16])(pauVar245[2] + 0x10) = auVar413;
                            *(undefined1 (*) [16])pauVar245[3] = auVar668;
                            *(undefined1 (*) [16])(pauVar245[3] + 0x10) = auVar534;
                            *(undefined1 (*) [16])pauVar245[4] = auVar309;
                            *(undefined1 (*) [16])(pauVar245[4] + 0x10) = auVar945;
                            *(undefined1 (*) [16])pauVar245[5] = auVar310;
                            *(undefined1 (*) [16])(pauVar245[5] + 0x10) = auVar268;
                          }
                          else if (iVar258 == 1) {
                            auVar1077 = vunpcklps_avx(auVar1075,auVar1074);
                            auVar1078 = vunpcklps_avx(auVar1135,auVar1259);
                            auVar1075 = vunpckhps_avx(auVar1075,auVar1074);
                            auVar1076 = vunpckhps_avx(auVar1135,auVar1259);
                            auVar1259 = vmovlhps_avx(auVar1077,auVar1078);
                            auVar1074 = vunpckhpd_avx(auVar1077,auVar1078);
                            auVar1135 = vmovlhps_avx(auVar1075,auVar1076);
                            auVar1075 = vunpckhpd_avx(auVar1075,auVar1076);
                            auVar1077 = vunpcklps_avx(auVar1168,auVar413);
                            auVar1078 = vunpcklps_avx(auVar668,auVar534);
                            auVar1168 = vunpckhps_avx(auVar1168,auVar413);
                            auVar1076 = vunpckhps_avx(auVar668,auVar534);
                            auVar534 = vmovlhps_avx(auVar1077,auVar1078);
                            auVar413 = vunpckhpd_avx(auVar1077,auVar1078);
                            auVar668 = vmovlhps_avx(auVar1168,auVar1076);
                            auVar1168 = vunpckhpd_avx(auVar1168,auVar1076);
                            auVar1077 = vunpcklps_avx(auVar309,auVar945);
                            auVar1078 = vunpcklps_avx(auVar310,auVar268);
                            auVar309 = vunpckhps_avx(auVar309,auVar945);
                            auVar1076 = vunpckhps_avx(auVar310,auVar268);
                            auVar268 = vmovlhps_avx(auVar1077,auVar1078);
                            auVar945 = vunpckhpd_avx(auVar1077,auVar1078);
                            auVar310 = vmovlhps_avx(auVar309,auVar1076);
                            auVar309 = vunpckhpd_avx(auVar309,auVar1076);
                            *pauVar238 = auVar1259;
                            lVar234 = (long)iVar192;
                            *(undefined1 (*) [16])(*pauVar238 + lVar234 * 4) = auVar1074;
                            lVar216 = (long)iVar249;
                            *(undefined1 (*) [16])(*pauVar238 + lVar216 * 4) = auVar1135;
                            *(undefined1 (*) [16])(*pauVar238 + lVar215 * 4) = auVar1075;
                            pauVar238[1] = auVar534;
                            *(undefined1 (*) [16])(pauVar238[1] + lVar234 * 4) = auVar413;
                            *(undefined1 (*) [16])(pauVar238[1] + lVar216 * 4) = auVar668;
                            *(undefined1 (*) [16])(pauVar238[1] + lVar215 * 4) = auVar1168;
                            pauVar238[2] = auVar268;
                            *(undefined1 (*) [16])(pauVar238[2] + lVar234 * 4) = auVar945;
                            *(undefined1 (*) [16])(pauVar238[2] + lVar216 * 4) = auVar310;
                            *(undefined1 (*) [16])(pauVar238[2] + lVar215 * 4) = auVar309;
                            pauVar238 = pauVar238 + 3;
                            uVar259 = (uint)local_840;
                          }
                          else if (iVar258 == 4) {
                            *pauVar238 = auVar1075;
                            pauVar238[1] = auVar1074;
                            pauVar238[2] = auVar1135;
                            pauVar238[3] = auVar1259;
                            pauVar238[4] = auVar1168;
                            pauVar238[5] = auVar413;
                            pauVar238[6] = auVar668;
                            pauVar238[7] = auVar534;
                            pauVar238[8] = auVar309;
                            pauVar238[9] = auVar945;
                            pauVar238[10] = auVar310;
                            pauVar238[0xb] = auVar268;
                            pauVar238 = pauVar238 + 0xc;
                          }
                          pauVar260 = pauVar260 + uVar210 * 3;
                          pauVar245 = pauVar245 + 6;
                        }
                        for (; (int)(uVar244 + 7) < iVar257; uVar244 = uVar244 + 8) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                              auVar1379 = ZEXT1664((undefined1  [16])0x0);
                              auVar1452 = ZEXT1664((undefined1  [16])0x0);
                              auVar1488 = ZEXT1664((undefined1  [16])0x0);
                              auVar1506 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar268 = *(undefined1 (*) [16])*pauVar236;
                              auVar1060 = ZEXT1664(auVar268);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar1218 = ZEXT1664(auVar268);
                              auVar1305 = ZEXT1664(auVar268);
                              auVar1379 = ZEXT1664(auVar268);
                              auVar1452 = ZEXT1664(auVar268);
                              auVar1488 = ZEXT1664(auVar268);
                              auVar1506 = ZEXT1664(auVar268);
                            }
                          }
                          else {
                            auVar1506 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1488 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                            auVar1452 = ZEXT1664(*(undefined1 (*) [16])pauVar245[1]);
                            auVar1379 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[1] + 0x10));
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])pauVar245[2]);
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[2] + 0x10));
                            auVar1218 = ZEXT1664(*(undefined1 (*) [16])pauVar245[3]);
                            auVar1305 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[3] + 0x10));
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar207 = (int)uVar229;
                            uVar229 = (ulong)(iVar207 - 1);
                            auVar1168 = auVar1506._0_16_;
                            auVar413 = auVar1488._0_16_;
                            auVar668 = auVar1452._0_16_;
                            auVar534 = auVar1379._0_16_;
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar309 = auVar1305._0_16_;
                            if (iVar207 == 0) break;
                            auVar1259 = *(undefined1 (*) [16])(*pauVar253 + lVar234);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 * 2);
                            auVar1061._4_4_ = uVar211;
                            auVar1061._0_4_ = uVar211;
                            auVar1061._8_4_ = uVar211;
                            auVar1061._12_4_ = uVar211;
                            auVar1168 = vfmadd231ps_fma(auVar1168,auVar1259,auVar1061);
                            auVar1506 = ZEXT1664(auVar1168);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 * 2 + 4);
                            auVar1062._4_4_ = uVar211;
                            auVar1062._0_4_ = uVar211;
                            auVar1062._8_4_ = uVar211;
                            auVar1062._12_4_ = uVar211;
                            auVar413 = vfmadd231ps_fma(auVar413,auVar1259,auVar1062);
                            auVar1488 = ZEXT1664(auVar413);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 * 2 + 8);
                            auVar1063._4_4_ = uVar211;
                            auVar1063._0_4_ = uVar211;
                            auVar1063._8_4_ = uVar211;
                            auVar1063._12_4_ = uVar211;
                            auVar668 = vfmadd231ps_fma(auVar668,auVar1259,auVar1063);
                            auVar1452 = ZEXT1664(auVar668);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 * 2 + 0xc);
                            auVar1064._4_4_ = uVar211;
                            auVar1064._0_4_ = uVar211;
                            auVar1064._8_4_ = uVar211;
                            auVar1064._12_4_ = uVar211;
                            auVar534 = vfmadd231ps_fma(auVar534,auVar1259,auVar1064);
                            auVar1379 = ZEXT1664(auVar534);
                            uVar211 = *(undefined4 *)(pauVar260[1] + lVar234 * 2);
                            auVar1065._4_4_ = uVar211;
                            auVar1065._0_4_ = uVar211;
                            auVar1065._8_4_ = uVar211;
                            auVar1065._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar1259,auVar1065);
                            auVar1060 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[1] + lVar234 * 2 + 4);
                            auVar1066._4_4_ = uVar211;
                            auVar1066._0_4_ = uVar211;
                            auVar1066._8_4_ = uVar211;
                            auVar1066._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar310,auVar1259,auVar1066);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[1] + lVar234 * 2 + 8);
                            auVar1067._4_4_ = uVar211;
                            auVar1067._0_4_ = uVar211;
                            auVar1067._8_4_ = uVar211;
                            auVar1067._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar945,auVar1259,auVar1067);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(pauVar260[1] + lVar234 * 2 + 0xc);
                            auVar1068._4_4_ = uVar211;
                            auVar1068._0_4_ = uVar211;
                            auVar1068._8_4_ = uVar211;
                            auVar1068._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar309,auVar1259,auVar1068);
                            auVar1305 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 0x10;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar1168;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar413;
                            *(undefined1 (*) [16])pauVar245[1] = auVar668;
                            *(undefined1 (*) [16])(pauVar245[1] + 0x10) = auVar534;
                            *(undefined1 (*) [16])pauVar245[2] = auVar268;
                            *(undefined1 (*) [16])(pauVar245[2] + 0x10) = auVar310;
                            *(undefined1 (*) [16])pauVar245[3] = auVar945;
                            *(undefined1 (*) [16])(pauVar245[3] + 0x10) = auVar309;
                          }
                          else if (iVar258 == 1) {
                            auVar1135 = vunpcklps_avx(auVar1168,auVar413);
                            auVar1074 = vunpcklps_avx(auVar668,auVar534);
                            auVar1168 = vunpckhps_avx(auVar1168,auVar413);
                            auVar1259 = vunpckhps_avx(auVar668,auVar534);
                            auVar534 = vmovlhps_avx(auVar1135,auVar1074);
                            auVar413 = vunpckhpd_avx(auVar1135,auVar1074);
                            auVar668 = vmovlhps_avx(auVar1168,auVar1259);
                            auVar1168 = vunpckhpd_avx(auVar1168,auVar1259);
                            auVar1135 = vunpcklps_avx(auVar268,auVar310);
                            auVar1074 = vunpcklps_avx(auVar945,auVar309);
                            auVar1259 = vunpckhps_avx(auVar268,auVar310);
                            auVar309 = vunpckhps_avx(auVar945,auVar309);
                            auVar268 = vmovlhps_avx(auVar1135,auVar1074);
                            auVar945 = vunpckhpd_avx(auVar1135,auVar1074);
                            auVar310 = vmovlhps_avx(auVar1259,auVar309);
                            auVar309 = vunpckhpd_avx(auVar1259,auVar309);
                            *pauVar238 = auVar534;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar192 * 4) = auVar413;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar249 * 4) = auVar668;
                            *(undefined1 (*) [16])(*pauVar238 + lVar215 * 4) = auVar1168;
                            pauVar238[1] = auVar268;
                            *(undefined1 (*) [16])(pauVar238[1] + (long)iVar192 * 4) = auVar945;
                            *(undefined1 (*) [16])(pauVar238[1] + (long)iVar249 * 4) = auVar310;
                            *(undefined1 (*) [16])(pauVar238[1] + lVar215 * 4) = auVar309;
                            pauVar238 = pauVar238 + 2;
                            uVar259 = (uint)local_840;
                          }
                          else if (iVar258 == 4) {
                            *pauVar238 = auVar1168;
                            pauVar238[1] = auVar413;
                            pauVar238[2] = auVar668;
                            pauVar238[3] = auVar534;
                            pauVar238[4] = auVar268;
                            pauVar238[5] = auVar310;
                            pauVar238[6] = auVar945;
                            pauVar238[7] = auVar309;
                            pauVar238 = pauVar238 + 8;
                          }
                          pauVar260 = pauVar260 + uVar210 * 2;
                          pauVar245 = pauVar245 + 4;
                        }
                        for (; (int)(uVar244 | 3) < iVar257; uVar244 = uVar244 + 4) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1218 = ZEXT1664((undefined1  [16])0x0);
                              auVar1305 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar268 = *(undefined1 (*) [16])*pauVar236;
                              auVar1060 = ZEXT1664(auVar268);
                              auVar1130 = ZEXT1664(auVar268);
                              auVar1218 = ZEXT1664(auVar268);
                              auVar1305 = ZEXT1664(auVar268);
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                            auVar1218 = ZEXT1664(*(undefined1 (*) [16])pauVar245[1]);
                            auVar1305 = ZEXT1664(*(undefined1 (*) [16])(pauVar245[1] + 0x10));
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar207 = (int)uVar229;
                            uVar229 = (ulong)(iVar207 - 1);
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar309 = auVar1305._0_16_;
                            if (iVar207 == 0) break;
                            auVar534 = *(undefined1 (*) [16])(*pauVar253 + lVar234);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234);
                            auVar747._4_4_ = uVar211;
                            auVar747._0_4_ = uVar211;
                            auVar747._8_4_ = uVar211;
                            auVar747._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar534,auVar747);
                            auVar1060 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 + 4);
                            auVar748._4_4_ = uVar211;
                            auVar748._0_4_ = uVar211;
                            auVar748._8_4_ = uVar211;
                            auVar748._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar310,auVar534,auVar748);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 + 8);
                            auVar749._4_4_ = uVar211;
                            auVar749._0_4_ = uVar211;
                            auVar749._8_4_ = uVar211;
                            auVar749._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar945,auVar534,auVar749);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 + 0xc);
                            auVar750._4_4_ = uVar211;
                            auVar750._0_4_ = uVar211;
                            auVar750._8_4_ = uVar211;
                            auVar750._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar309,auVar534,auVar750);
                            auVar1305 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 0x10;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar310;
                            *(undefined1 (*) [16])pauVar245[1] = auVar945;
                            *(undefined1 (*) [16])(pauVar245[1] + 0x10) = auVar309;
                          }
                          else if (iVar258 == 1) {
                            auVar668 = vunpcklps_avx(auVar268,auVar310);
                            auVar413 = vunpcklps_avx(auVar945,auVar309);
                            auVar534 = vunpckhps_avx(auVar268,auVar310);
                            auVar309 = vunpckhps_avx(auVar945,auVar309);
                            auVar268 = vmovlhps_avx(auVar668,auVar413);
                            auVar945 = vunpckhpd_avx(auVar668,auVar413);
                            auVar310 = vmovlhps_avx(auVar534,auVar309);
                            auVar309 = vunpckhpd_avx(auVar534,auVar309);
                            *pauVar238 = auVar268;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar192 * 4) = auVar945;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar249 * 4) = auVar310;
                            *(undefined1 (*) [16])(*pauVar238 + lVar215 * 4) = auVar309;
                            pauVar238 = pauVar238 + 1;
                          }
                          else if (iVar258 == 4) {
                            *pauVar238 = auVar268;
                            pauVar238[1] = auVar310;
                            pauVar238[2] = auVar945;
                            pauVar238[3] = auVar309;
                            pauVar238 = pauVar238 + 4;
                          }
                          pauVar260 = pauVar260 + uVar210;
                          pauVar245 = pauVar245 + 2;
                        }
                        for (; (int)(uVar244 | 1) < iVar257; uVar244 = uVar244 + 2) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1130 = ZEXT1664((undefined1  [16])0x0);
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar1130 = ZEXT1664(*(undefined1 (*) [16])*pauVar236);
                              auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar236);
                            }
                          }
                          else {
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar207 = (int)uVar229;
                            uVar229 = (ulong)(iVar207 - 1);
                            auVar310 = auVar1130._0_16_;
                            auVar268 = auVar1060._0_16_;
                            if (iVar207 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234);
                            auVar508._4_4_ = uVar211;
                            auVar508._0_4_ = uVar211;
                            auVar508._8_4_ = uVar211;
                            auVar508._12_4_ = uVar211;
                            auVar310 = vfmadd231ps_fma(auVar310,*(undefined1 (*) [16])
                                                                 (*pauVar253 + lVar234 * 2),auVar508
                                                      );
                            auVar1130 = ZEXT1664(auVar310);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 + 4);
                            auVar509._4_4_ = uVar211;
                            auVar509._0_4_ = uVar211;
                            auVar509._8_4_ = uVar211;
                            auVar509._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,*(undefined1 (*) [16])
                                                                 (*pauVar253 + lVar234 * 2),auVar509
                                                      );
                            auVar1060 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 8;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar310;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar268;
                          }
                          else if (iVar258 == 1) {
                            *(int *)*pauVar238 = auVar1130._0_4_;
                            uVar211 = vextractps_avx(auVar310,1);
                            *(undefined4 *)(*pauVar238 + (long)iVar192 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar310,2);
                            *(undefined4 *)(*pauVar238 + (long)iVar249 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar310,3);
                            *(undefined4 *)(*pauVar238 + lVar256 * 4) = uVar211;
                            *(int *)(*pauVar238 + 4) = auVar1060._0_4_;
                            uVar211 = vextractps_avx(auVar268,1);
                            *(undefined4 *)(*pauVar238 + lVar201 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar268,2);
                            *(undefined4 *)(*pauVar238 + (long)local_760 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar268,3);
                            *(undefined4 *)(*pauVar238 + (long)(int)local_780 * 4) = uVar211;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 8);
                          }
                          else if (iVar258 == 4) {
                            *pauVar238 = auVar310;
                            pauVar238[1] = auVar268;
                            pauVar238 = pauVar238 + 2;
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + lVar219);
                          pauVar245 = pauVar245 + 1;
                        }
                        for (; (int)uVar244 < iVar257; uVar244 = uVar244 + 1) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar236);
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar207 = (int)uVar229;
                            uVar229 = (ulong)(iVar207 - 1);
                            auVar268 = auVar1060._0_16_;
                            if (iVar207 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234);
                            auVar312._4_4_ = uVar211;
                            auVar312._0_4_ = uVar211;
                            auVar312._8_4_ = uVar211;
                            auVar312._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar312,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar253 + lVar234 * 4));
                            auVar1060 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 4;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                          }
                          else if (iVar258 == 1) {
                            *(int *)*pauVar238 = auVar1060._0_4_;
                            uVar211 = vextractps_avx(auVar268,1);
                            *(undefined4 *)(*pauVar238 + (long)iVar192 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar268,2);
                            *(undefined4 *)(*pauVar238 + (long)iVar249 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar268,3);
                            *(undefined4 *)(*pauVar238 + lVar215 * 4) = uVar211;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 4);
                          }
                          else if (iVar258 == 4) {
                            *pauVar238 = auVar268;
                            pauVar238 = pauVar238 + 1;
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + local_a40);
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 0x10);
                        }
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + local_a00._0_8_);
                      }
                      local_a20 = (long)(int)(uVar247 * 2) * 4;
                      for (; (long)(uVar209 | 1) < lVar200; uVar209 = uVar209 + 2) {
                        pauVar195 = (undefined1 (*) [32])
                                    ((long)(this->super_Convolution).bias_data.data +
                                    uVar209 * 4 + lVar208 * 4);
                        if (pauVar236 != (undefined1 (*) [32])0x0) {
                          pauVar236 = pauVar195;
                        }
                        pauVar238 = (undefined1 (*) [16])
                                    ((long)top_blob->data +
                                    (long)local_850 * 4 + (uVar209 + lVar208) * (long)iVar192 * 4);
                        pauVar260 = pauVar226;
                        for (uVar244 = 0; (int)(uVar244 + 0xb) < iVar257; uVar244 = uVar244 + 0xc) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT864(0) << 0x40;
                              auVar1218 = ZEXT864(0) << 0x40;
                              auVar1305 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar1379 = ZEXT1664(ZEXT816(0) << 0x40);
                              auVar1452 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar270._4_4_ = uVar211;
                              auVar270._0_4_ = uVar211;
                              auVar270._8_4_ = uVar211;
                              auVar270._12_4_ = uVar211;
                              auVar1060 = ZEXT1664(auVar270);
                              uVar211 = *(undefined4 *)(*pauVar236 + 4);
                              auVar510._4_4_ = uVar211;
                              auVar510._0_4_ = uVar211;
                              auVar510._8_4_ = uVar211;
                              auVar510._12_4_ = uVar211;
                              auVar1305 = ZEXT1664(auVar510);
                              auVar1130 = ZEXT1664(auVar270);
                              auVar1218 = ZEXT1664(auVar270);
                              auVar1379 = ZEXT1664(auVar510);
                              auVar1452 = ZEXT1664(auVar510);
                            }
                          }
                          else {
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0x88);
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[1],
                                                   *(undefined1 (*) [16])(pauVar245[1] + 0x10),0x88)
                            ;
                            auVar1130 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[2],
                                                   *(undefined1 (*) [16])(pauVar245[2] + 0x10),0x88)
                            ;
                            auVar1218 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0xdd);
                            auVar1305 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[1],
                                                   *(undefined1 (*) [16])(pauVar245[1] + 0x10),0xdd)
                            ;
                            auVar1379 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[2],
                                                   *(undefined1 (*) [16])(pauVar245[2] + 0x10),0xdd)
                            ;
                            auVar1452 = ZEXT1664(auVar268);
                          }
                          lVar234 = 0;
                          pauVar240 = pauVar260;
                          while( true ) {
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar309 = auVar1305._0_16_;
                            auVar534 = auVar1379._0_16_;
                            auVar668 = auVar1452._0_16_;
                            if (iVar190 == (int)lVar234) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 * 8);
                            auVar1069._4_4_ = uVar211;
                            auVar1069._0_4_ = uVar211;
                            auVar1069._8_4_ = uVar211;
                            auVar1069._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar1069,*pauVar240);
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar310,auVar1069,pauVar240[1]);
                            auVar1130 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar945,pauVar240[2],auVar1069);
                            auVar1218 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 * 8 + 4);
                            auVar1070._4_4_ = uVar211;
                            auVar1070._0_4_ = uVar211;
                            auVar1070._8_4_ = uVar211;
                            auVar1070._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar309,auVar1070,*pauVar240);
                            auVar1305 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar534,auVar1070,pauVar240[1]);
                            auVar1379 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar668,auVar1070,pauVar240[2]);
                            auVar1452 = ZEXT1664(auVar268);
                            pauVar240 = pauVar240 + 3;
                            lVar234 = lVar234 + 1;
                          }
                          if (iVar189 < (int)uVar259) {
                            auVar413 = vunpcklps_avx(auVar268,auVar309);
                            auVar268 = vunpckhps_avx(auVar268,auVar309);
                            auVar309 = vunpcklps_avx(auVar310,auVar534);
                            auVar310 = vunpckhps_avx(auVar310,auVar534);
                            auVar534 = vunpcklps_avx(auVar945,auVar668);
                            auVar945 = vunpckhps_avx(auVar945,auVar668);
                            *(undefined1 (*) [16])*pauVar245 = auVar413;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar268;
                            *(undefined1 (*) [16])pauVar245[1] = auVar309;
                            *(undefined1 (*) [16])(pauVar245[1] + 0x10) = auVar310;
                            *(undefined1 (*) [16])pauVar245[2] = auVar534;
                            *(undefined1 (*) [16])(pauVar245[2] + 0x10) = auVar945;
                          }
                          else {
                            *pauVar238 = auVar268;
                            pauVar238[1] = auVar310;
                            pauVar238[2] = auVar945;
                            lVar234 = (long)iVar192;
                            *(undefined1 (*) [16])(*pauVar238 + lVar234 * 4) = auVar309;
                            *(undefined1 (*) [16])(pauVar238[1] + lVar234 * 4) = auVar534;
                            *(undefined1 (*) [16])(pauVar238[2] + lVar234 * 4) = auVar668;
                            pauVar238 = pauVar238 + 3;
                          }
                          pauVar260 = pauVar260 + uVar210 * 3;
                          pauVar245 = pauVar245 + 3;
                        }
                        for (; (int)(uVar244 + 7) < iVar257; uVar244 = uVar244 + 8) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT864(0) << 0x40;
                              auVar1218 = ZEXT864(0) << 0x40;
                              auVar1305 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar271._4_4_ = uVar211;
                              auVar271._0_4_ = uVar211;
                              auVar271._8_4_ = uVar211;
                              auVar271._12_4_ = uVar211;
                              auVar1060 = ZEXT1664(auVar271);
                              uVar211 = *(undefined4 *)(*pauVar236 + 4);
                              auVar400._4_4_ = uVar211;
                              auVar400._0_4_ = uVar211;
                              auVar400._8_4_ = uVar211;
                              auVar400._12_4_ = uVar211;
                              auVar1218 = ZEXT1664(auVar400);
                              auVar1130 = ZEXT1664(auVar271);
                              auVar1305 = ZEXT1664(auVar400);
                            }
                          }
                          else {
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0x88);
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[1],
                                                   *(undefined1 (*) [16])(pauVar245[1] + 0x10),0x88)
                            ;
                            auVar1130 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0xdd);
                            auVar1218 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])pauVar245[1],
                                                   *(undefined1 (*) [16])(pauVar245[1] + 0x10),0xdd)
                            ;
                            auVar1305 = ZEXT1664(auVar268);
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar258 = (int)uVar229;
                            uVar229 = (ulong)(iVar258 - 1);
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar945 = auVar1218._0_16_;
                            auVar309 = auVar1305._0_16_;
                            if (iVar258 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234);
                            auVar870._4_4_ = uVar211;
                            auVar870._0_4_ = uVar211;
                            auVar870._8_4_ = uVar211;
                            auVar870._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar870,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar260 + lVar234 * 4));
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar310,*(undefined1 (*) [16])
                                                                 (pauVar260[1] + lVar234 * 4),
                                                       auVar870);
                            auVar1130 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 + 4);
                            auVar871._4_4_ = uVar211;
                            auVar871._0_4_ = uVar211;
                            auVar871._8_4_ = uVar211;
                            auVar871._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar945,auVar871,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar260 + lVar234 * 4));
                            auVar1218 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar309,auVar871,
                                                       *(undefined1 (*) [16])
                                                        (pauVar260[1] + lVar234 * 4));
                            auVar1305 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 8;
                          }
                          if (iVar189 < (int)uVar259) {
                            auVar534 = vunpcklps_avx(auVar268,auVar945);
                            auVar268 = vunpckhps_avx(auVar268,auVar945);
                            auVar945 = vunpcklps_avx(auVar310,auVar309);
                            auVar310 = vunpckhps_avx(auVar310,auVar309);
                            *(undefined1 (*) [16])*pauVar245 = auVar534;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar268;
                            *(undefined1 (*) [16])pauVar245[1] = auVar945;
                            *(undefined1 (*) [16])(pauVar245[1] + 0x10) = auVar310;
                          }
                          else {
                            *pauVar238 = auVar268;
                            pauVar238[1] = auVar310;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar192 * 4) = auVar945;
                            *(undefined1 (*) [16])(pauVar238[1] + (long)iVar192 * 4) = auVar309;
                            pauVar238 = pauVar238 + 2;
                          }
                          pauVar260 = pauVar260 + uVar210 * 2;
                          pauVar245 = pauVar245 + 2;
                        }
                        for (; (int)(uVar244 | 3) < iVar257; uVar244 = uVar244 + 4) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT864(0) << 0x40;
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar1060 = ZEXT1664(CONCAT412(uVar211,CONCAT48(uVar211,CONCAT44(
                                                  uVar211,uVar211))));
                              uVar211 = *(undefined4 *)(*pauVar236 + 4);
                              auVar1130 = ZEXT1664(CONCAT412(uVar211,CONCAT48(uVar211,CONCAT44(
                                                  uVar211,uVar211))));
                            }
                          }
                          else {
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0x88);
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vshufps_avx(*(undefined1 (*) [16])*pauVar245,
                                                   *(undefined1 (*) [16])(*pauVar245 + 0x10),0xdd);
                            auVar1130 = ZEXT1664(auVar268);
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar258 = (int)uVar229;
                            uVar229 = (ulong)(iVar258 - 1);
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            if (iVar258 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234);
                            auVar511._4_4_ = uVar211;
                            auVar511._0_4_ = uVar211;
                            auVar511._8_4_ = uVar211;
                            auVar511._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,*(undefined1 (*) [16])
                                                                 (*pauVar260 + lVar234 * 2),auVar511
                                                      );
                            auVar1060 = ZEXT1664(auVar268);
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 + 4);
                            auVar512._4_4_ = uVar211;
                            auVar512._0_4_ = uVar211;
                            auVar512._8_4_ = uVar211;
                            auVar512._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar310,*(undefined1 (*) [16])
                                                                 (*pauVar260 + lVar234 * 2),auVar512
                                                      );
                            auVar1130 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 8;
                          }
                          if (iVar189 < (int)uVar259) {
                            auVar945 = vunpcklps_avx(auVar268,auVar310);
                            auVar268 = vunpckhps_avx(auVar268,auVar310);
                            *(undefined1 (*) [16])*pauVar245 = auVar945;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar268;
                          }
                          else {
                            *pauVar238 = auVar268;
                            *(undefined1 (*) [16])(*pauVar238 + (long)iVar192 * 4) = auVar310;
                            pauVar238 = pauVar238 + 1;
                          }
                          pauVar260 = pauVar260 + uVar210;
                          pauVar245 = pauVar245 + 1;
                        }
                        for (; (int)(uVar244 | 1) < iVar257; uVar244 = uVar244 + 2) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              auVar1060 = ZEXT1664(CONCAT88(*(undefined8 *)*pauVar236,
                                                            *(undefined8 *)*pauVar236));
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                          }
                          for (lVar234 = 0; auVar268 = auVar1060._0_16_, iVar190 != (int)lVar234;
                              lVar234 = lVar234 + 1) {
                            auVar313._8_8_ = *(undefined8 *)(*pauVar253 + lVar234 * 8);
                            auVar313._0_8_ = *(undefined8 *)(*pauVar253 + lVar234 * 8);
                            auVar401._8_8_ = 0;
                            auVar401._0_8_ = *(ulong *)(*pauVar260 + lVar234 * 8);
                            auVar310 = vshufps_avx(auVar401,auVar401,0x50);
                            auVar268 = vfmadd231ps_fma(auVar268,auVar313,auVar310);
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                          }
                          else {
                            auVar310 = vshufps_avx(auVar268,auVar268,0xe8);
                            uVar266 = vmovlps_avx(auVar310);
                            *(undefined8 *)*pauVar238 = uVar266;
                            uVar211 = vextractps_avx(auVar268,1);
                            *(undefined4 *)(*pauVar238 + (long)iVar192 * 4) = uVar211;
                            uVar211 = vextractps_avx(auVar268,3);
                            *(undefined4 *)(*pauVar238 + lVar201 * 4) = uVar211;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 8);
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + lVar219);
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 0x10);
                        }
                        for (; (int)uVar244 < iVar257; uVar244 = uVar244 + 1) {
                          pauVar235 = pauVar245;
                          pauVar212 = pauVar245;
                          if ((iVar239 == 0) &&
                             (pauVar235 = pauVar195, pauVar212 = pauVar236,
                             pauVar236 == (undefined1 (*) [32])0x0)) {
                            auVar268 = (undefined1  [16])0x0;
                          }
                          else {
                            auVar268 = vinsertps_avx(ZEXT416(*(uint *)*pauVar235),
                                                     ZEXT416(*(uint *)(*pauVar212 + 4)),0x10);
                          }
                          for (lVar234 = 0; iVar190 != (int)lVar234; lVar234 = lVar234 + 1) {
                            auVar314._8_8_ = 0;
                            auVar314._0_8_ = *(ulong *)(*pauVar253 + lVar234 * 8);
                            uVar211 = *(undefined4 *)(*pauVar260 + lVar234 * 4);
                            auVar402._4_4_ = uVar211;
                            auVar402._0_4_ = uVar211;
                            auVar402._8_4_ = uVar211;
                            auVar402._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar314,auVar402);
                          }
                          if (iVar189 < (int)uVar259) {
                            uVar266 = vmovlps_avx(auVar268);
                            *(undefined8 *)*pauVar245 = uVar266;
                          }
                          else {
                            *(int *)*pauVar238 = auVar268._0_4_;
                            uVar211 = vextractps_avx(auVar268,1);
                            *(undefined4 *)(*pauVar238 + (long)iVar192 * 4) = uVar211;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 4);
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + local_a40);
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 8);
                        }
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + local_a20);
                      }
                      local_a80 = (int *)((long)(int)uVar247 * 4);
                      for (; (long)uVar209 < lVar200; uVar209 = uVar209 + 1) {
                        pauVar238 = (undefined1 (*) [16])
                                    ((long)top_blob->data +
                                    (long)local_850 * 4 + (uVar209 + lVar208) * (long)iVar192 * 4);
                        if (pauVar236 != (undefined1 (*) [32])0x0) {
                          pauVar236 = (undefined1 (*) [32])
                                      ((long)(this->super_Convolution).bias_data.data +
                                      uVar209 * 4 + lVar208 * 4);
                        }
                        pauVar260 = pauVar226;
                        for (uVar244 = 0; (int)(uVar244 + 0xb) < iVar257; uVar244 = uVar244 + 0xc) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT864(0) << 0x40;
                              auVar1218 = ZEXT864(0) << 0x40;
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar272._4_4_ = uVar211;
                              auVar272._0_4_ = uVar211;
                              auVar272._8_4_ = uVar211;
                              auVar272._12_4_ = uVar211;
                              auVar1060 = ZEXT1664(auVar272);
                              auVar1130 = ZEXT1664(auVar272);
                              auVar1218 = ZEXT1664(auVar272);
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                            auVar1218 = ZEXT1664(*(undefined1 (*) [16])pauVar245[1]);
                          }
                          lVar234 = 0;
                          pauVar240 = pauVar260;
                          while( true ) {
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            auVar945 = auVar1218._0_16_;
                            if (iVar190 == (int)lVar234) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 * 4);
                            auVar513._4_4_ = uVar211;
                            auVar513._0_4_ = uVar211;
                            auVar513._8_4_ = uVar211;
                            auVar513._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar513,*pauVar240);
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar310,auVar513,pauVar240[1]);
                            auVar1130 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar945,auVar513,pauVar240[2]);
                            auVar1218 = ZEXT1664(auVar268);
                            pauVar240 = pauVar240 + 3;
                            lVar234 = lVar234 + 1;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar310;
                            *(undefined1 (*) [16])pauVar245[1] = auVar945;
                          }
                          else {
                            *pauVar238 = auVar268;
                            pauVar238[1] = auVar310;
                            pauVar238[2] = auVar945;
                            pauVar238 = pauVar238 + 3;
                          }
                          pauVar260 = pauVar260 + uVar210 * 3;
                          pauVar245 = (undefined1 (*) [32])(pauVar245[1] + 0x10);
                        }
                        for (; (int)(uVar244 + 7) < iVar257; uVar244 = uVar244 + 8) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                              auVar1130 = ZEXT864(0) << 0x40;
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar273._4_4_ = uVar211;
                              auVar273._0_4_ = uVar211;
                              auVar273._8_4_ = uVar211;
                              auVar273._12_4_ = uVar211;
                              auVar1060 = ZEXT1664(auVar273);
                              auVar1130 = ZEXT1664(auVar273);
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                            auVar1130 = ZEXT1664(*(undefined1 (*) [16])(*pauVar245 + 0x10));
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar258 = (int)uVar229;
                            uVar229 = (ulong)(iVar258 - 1);
                            auVar268 = auVar1060._0_16_;
                            auVar310 = auVar1130._0_16_;
                            if (iVar258 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234);
                            auVar403._4_4_ = uVar211;
                            auVar403._0_4_ = uVar211;
                            auVar403._8_4_ = uVar211;
                            auVar403._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar403,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar260 + lVar234 * 8));
                            auVar1060 = ZEXT1664(auVar268);
                            auVar268 = vfmadd231ps_fma(auVar310,auVar403,
                                                       *(undefined1 (*) [16])
                                                        (pauVar260[1] + lVar234 * 8));
                            auVar1130 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 4;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                            *(undefined1 (*) [16])(*pauVar245 + 0x10) = auVar310;
                          }
                          else {
                            *pauVar238 = auVar268;
                            pauVar238[1] = auVar310;
                            pauVar238 = pauVar238 + 2;
                          }
                          pauVar260 = pauVar260 + uVar210 * 2;
                          pauVar245 = pauVar245 + 1;
                        }
                        for (; (int)(uVar244 | 3) < iVar257; uVar244 = uVar244 + 4) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar1060 = ZEXT1664(CONCAT412(uVar211,CONCAT48(uVar211,CONCAT44(
                                                  uVar211,uVar211))));
                            }
                          }
                          else {
                            auVar1060 = ZEXT1664(*(undefined1 (*) [16])*pauVar245);
                          }
                          lVar234 = 0;
                          uVar229 = uVar210;
                          while( true ) {
                            iVar258 = (int)uVar229;
                            uVar229 = (ulong)(iVar258 - 1);
                            auVar268 = auVar1060._0_16_;
                            if (iVar258 == 0) break;
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234);
                            auVar315._4_4_ = uVar211;
                            auVar315._0_4_ = uVar211;
                            auVar315._8_4_ = uVar211;
                            auVar315._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar315,
                                                       *(undefined1 (*) [16])
                                                        (*pauVar260 + lVar234 * 4));
                            auVar1060 = ZEXT1664(auVar268);
                            lVar234 = lVar234 + 4;
                          }
                          if (iVar189 < (int)uVar259) {
                            *(undefined1 (*) [16])*pauVar245 = auVar268;
                          }
                          else {
                            *pauVar238 = auVar268;
                            pauVar238 = pauVar238 + 1;
                          }
                          pauVar260 = pauVar260 + uVar210;
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 0x10);
                        }
                        for (; (int)(uVar244 | 1) < iVar257; uVar244 = uVar244 + 2) {
                          if (iVar239 == 0) {
                            if (pauVar236 == (undefined1 (*) [32])0x0) {
                              auVar1060 = ZEXT1664((undefined1  [16])0x0);
                            }
                            else {
                              uVar211 = *(undefined4 *)*pauVar236;
                              auVar1060 = ZEXT1664(CONCAT412(uVar211,CONCAT48(uVar211,CONCAT44(
                                                  uVar211,uVar211))));
                            }
                          }
                          else {
                            auVar1060 = ZEXT864(*(ulong *)*pauVar245);
                          }
                          for (lVar234 = 0; auVar268 = auVar1060._0_16_, iVar190 != (int)lVar234;
                              lVar234 = lVar234 + 1) {
                            auVar316._8_8_ = 0;
                            auVar316._0_8_ = *(ulong *)(*pauVar260 + lVar234 * 8);
                            uVar211 = *(undefined4 *)(*pauVar253 + lVar234 * 4);
                            auVar404._4_4_ = uVar211;
                            auVar404._0_4_ = uVar211;
                            auVar404._8_4_ = uVar211;
                            auVar404._12_4_ = uVar211;
                            auVar268 = vfmadd231ps_fma(auVar268,auVar316,auVar404);
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          if (iVar189 < (int)uVar259) {
                            uVar266 = vmovlpd_avx(auVar268);
                            *(undefined8 *)*pauVar245 = uVar266;
                          }
                          else {
                            uVar266 = vmovlpd_avx(auVar268);
                            *(undefined8 *)*pauVar238 = uVar266;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 8);
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + lVar219);
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 8);
                        }
                        for (; (int)uVar244 < iVar257; uVar244 = uVar244 + 1) {
                          auVar1060 = ZEXT1664((undefined1  [16])0x0);
                          if (iVar239 != 0 || pauVar236 != (undefined1 (*) [32])0x0) {
                            pauVar195 = pauVar236;
                            if (iVar239 != 0) {
                              pauVar195 = pauVar245;
                            }
                            auVar1060 = ZEXT464(*(uint *)*pauVar195);
                          }
                          for (lVar234 = 0; iVar190 != (int)lVar234; lVar234 = lVar234 + 1) {
                            auVar268 = vfmadd231ss_fma(auVar1060._0_16_,
                                                       ZEXT416(*(uint *)(*pauVar260 + lVar234 * 4)),
                                                       ZEXT416(*(uint *)(*pauVar253 + lVar234 * 4)))
                            ;
                            auVar1060 = ZEXT1664(auVar268);
                          }
                          if (iVar189 < (int)uVar259) {
                            *(int *)*pauVar245 = auVar1060._0_4_;
                          }
                          else {
                            *(int *)*pauVar238 = auVar1060._0_4_;
                            pauVar238 = (undefined1 (*) [16])(*pauVar238 + 4);
                          }
                          pauVar260 = (undefined1 (*) [16])(*pauVar260 + local_a40);
                          pauVar245 = (undefined1 (*) [32])(*pauVar245 + 4);
                        }
                        pauVar253 = (undefined1 (*) [32])(*pauVar253 + (long)local_a80);
                      }
                      uVar244 = (uint)local_6b8.data;
                    }
                  }
                  iVar187 = (int)local_6d0 + 1;
                }
              }
              else {
                Mat::create((Mat *)local_8d0,(int)local_810.data * (int)local_738.data,1,iVar187,4,
                            opt->workspace_allocator);
                local_6d8 = 0xffffffffffffff9c;
                local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60);
                local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40);
                local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80);
                local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20);
                if ((local_8d0 != (undefined1  [8])0x0) &&
                   (local_a60 = CONCAT44(local_a60._4_4_,(float)local_a60),
                   local_a40 = CONCAT44(local_a40._4_4_,(float)local_a40),
                   local_a80 = (int *)CONCAT44(local_a80._4_4_,(float)local_a80),
                   local_a20 = CONCAT44(local_a20._4_4_,(int)local_a20),
                   (long)iStack_898 * local_890 != 0)) goto LAB_001ba0ba;
              }
              uVar210 = local_6d8;
              piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
              if (piVar255 != (int *)0x0) {
                LOCK();
                *piVar255 = *piVar255 + -1;
                UNLOCK();
                if (*piVar255 == 0) {
                  if (local_8b0 == (Allocator *)0x0) {
                    free((void *)local_8d0);
                  }
                  else {
                    (*local_8b0->_vptr_Allocator[3])();
                  }
                }
              }
            }
            iVar189 = (int)uVar210;
            piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
            if (piVar255 != (int *)0x0) {
              LOCK();
              *piVar255 = *piVar255 + -1;
              UNLOCK();
              if (*piVar255 == 0) {
                if (local_640 == (Allocator *)0x0) {
                  free((void *)local_660);
                }
                else {
                  (*local_640->_vptr_Allocator[3])();
                }
              }
            }
            local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
            local_780 = CONCAT44(local_780._4_4_,(int)local_780);
            if (iVar189 == 0) {
              pLVar233 = this->activation;
              iVar189 = 0;
              local_840 = CONCAT44(local_840._4_4_,(uint)local_840);
              local_780 = CONCAT44(local_780._4_4_,(int)local_780);
              if (pLVar233 != (Layer *)0x0) {
                (*pLVar233->_vptr_Layer[9])(pLVar233,top_blob,opt);
              }
            }
          }
        }
      }
    }
LAB_001c6881:
    piVar255 = (int *)CONCAT44(local_920.refcount._4_4_,local_920.refcount._0_4_);
    if (piVar255 == (int *)0x0) {
      return iVar189;
    }
    LOCK();
    *piVar255 = *piVar255 + -1;
    UNLOCK();
    if (*piVar255 != 0) {
      return iVar189;
    }
    auVar230 = (undefined1  [8])local_920.data;
    if (local_920.allocator != (Allocator *)0x0) {
      (*(local_920.allocator)->_vptr_Allocator[3])();
      return iVar189;
    }
    goto LAB_001c68b3;
  }
  local_620 = 0;
  local_660 = (undefined1  [8])0x0;
  afStack_658[0] = 0.0;
  afStack_658[1] = 0.0;
  uStack_650 = (pointer)0x0;
  afStack_648[0] = 0.0;
  local_640 = (Allocator *)0x0;
  iStack_638 = 0;
  fStack_634 = 0.0;
  fStack_630 = 0.0;
  iStack_62c = 0;
  iStack_628 = 0;
  if ((bottom_blob->elemsize & 0xf) == 0) {
    if ((Mat *)local_660 == bottom_blob) {
      iStack_628 = bottom_blob->w;
    }
    else {
      piVar255 = bottom_blob->refcount;
      if (piVar255 != (int *)0x0) {
        LOCK();
        *piVar255 = *piVar255 + 1;
        UNLOCK();
      }
      local_660 = (undefined1  [8])bottom_blob->data;
      afStack_658[0] = SUB84(bottom_blob->refcount,0);
      afStack_658[1] = (float)((ulong)bottom_blob->refcount >> 0x20);
      uStack_650 = (pointer)bottom_blob->elemsize;
      afStack_648[0] = (float)bottom_blob->elempack;
      local_640 = bottom_blob->allocator;
      iStack_628 = bottom_blob->w;
      iStack_62c = bottom_blob->d;
    }
    iStack_638 = 3;
    fStack_634 = 1.4013e-45;
    fStack_630 = 1.4013e-45;
    local_620 = 1;
LAB_001bd57a:
    local_890 = 0;
    local_8d0 = (undefined1  [8])0x0;
    fStack_8c8 = 0.0;
    uStack_8c4 = 0;
    local_8c0 = 0;
    uStack_8bf = 0;
    local_8b8 = 0.0;
    local_8b0 = (Allocator *)0x0;
    iStack_8a8 = 0;
    fStack_8a4 = 0.0;
    fStack_8a0 = 0.0;
    iStack_89c = 0;
    iStack_898 = 0;
    iVar189 = (*(this->super_Convolution).super_Layer._vptr_Layer[7])
                        (this,local_660,(Mat *)local_8d0,opt);
    if (iVar189 == 0) {
      if ((local_8c0 & 0xf) == 0) {
        if ((Mat *)local_8d0 != top_blob) {
          piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
          if (piVar255 != (int *)0x0) {
            LOCK();
            *piVar255 = *piVar255 + 1;
            UNLOCK();
          }
          piVar255 = top_blob->refcount;
          if (piVar255 != (int *)0x0) {
            LOCK();
            *piVar255 = *piVar255 + -1;
            UNLOCK();
            if (*piVar255 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = (void *)local_8d0;
          top_blob->refcount = (int *)CONCAT44(uStack_8c4,fStack_8c8);
          top_blob->elemsize = CONCAT71(uStack_8bf,local_8c0);
          top_blob->elempack = (int)local_8b8;
          top_blob->allocator = local_8b0;
          top_blob->dims = iStack_8a8;
          top_blob->w = (int)fStack_8a4;
          top_blob->h = (int)fStack_8a0;
          top_blob->d = iStack_89c;
          top_blob->c = iStack_898;
          top_blob->cstep = local_890;
        }
        top_blob->dims = 1;
        top_blob->w = iStack_898;
        top_blob->h = 1;
        top_blob->c = 1;
        local_620 = (size_t)iStack_898;
      }
      else {
        Mat::reshape(&local_810,(Mat *)local_8d0,iStack_898,opt->blob_allocator);
        piVar255 = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
        if (&local_810 != top_blob) {
          if (piVar255 != (int *)0x0) {
            LOCK();
            *piVar255 = *piVar255 + 1;
            UNLOCK();
          }
          piVar255 = top_blob->refcount;
          if (piVar255 != (int *)0x0) {
            LOCK();
            *piVar255 = *piVar255 + -1;
            UNLOCK();
            if (*piVar255 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          piVar255 = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
          top_blob->data = (void *)CONCAT44(local_810.data._4_4_,(int)local_810.data);
          top_blob->refcount = (int *)CONCAT44(local_810.refcount._4_4_,local_810.refcount._0_4_);
          top_blob->elemsize = local_810.elemsize;
          top_blob->elempack = local_810.elempack;
          top_blob->allocator = local_810.allocator;
          top_blob->dims = local_810.dims;
          top_blob->w = local_810.w;
          top_blob->h = local_810.h;
          top_blob->d = local_810.d;
          top_blob->c = local_810.c;
          top_blob->cstep = local_810.cstep;
        }
        if (piVar255 != (int *)0x0) {
          LOCK();
          *piVar255 = *piVar255 + -1;
          UNLOCK();
          if (*piVar255 == 0) {
            if (local_810.allocator == (Allocator *)0x0) {
              free((void *)CONCAT44(local_810.data._4_4_,(int)local_810.data));
            }
            else {
              (*(local_810.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar189 = -100;
        if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
        goto LAB_001be54c;
      }
      iVar189 = 0;
    }
LAB_001be54c:
    piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
    if (piVar255 != (int *)0x0) {
      LOCK();
      *piVar255 = *piVar255 + -1;
      UNLOCK();
      if (*piVar255 == 0) {
        if (local_8b0 == (Allocator *)0x0) {
          free((void *)local_8d0);
        }
        else {
          (*local_8b0->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    Mat::reshape((Mat *)local_8d0,bottom_blob,1,1,bottom_blob->w,opt->workspace_allocator);
    piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
    if (piVar255 != (int *)0x0) {
      LOCK();
      *piVar255 = *piVar255 + 1;
      UNLOCK();
    }
    piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
    if (piVar255 != (int *)0x0) {
      LOCK();
      *piVar255 = *piVar255 + -1;
      UNLOCK();
      if (*piVar255 == 0) {
        if (local_640 == (Allocator *)0x0) {
          free((void *)local_660);
        }
        else {
          (*local_640->_vptr_Allocator[3])();
        }
      }
    }
    piVar255 = (int *)CONCAT44(uStack_8c4,fStack_8c8);
    local_660 = local_8d0;
    afStack_658[0] = fStack_8c8;
    afStack_658[1] = (float)uStack_8c4;
    uStack_650 = (pointer)CONCAT71(uStack_8bf,local_8c0);
    afStack_648[0] = local_8b8;
    local_640 = local_8b0;
    iStack_638 = iStack_8a8;
    fStack_634 = fStack_8a4;
    fStack_630 = fStack_8a0;
    iStack_62c = iStack_89c;
    iStack_628 = iStack_898;
    local_620 = local_890;
    if (piVar255 != (int *)0x0) {
      LOCK();
      *piVar255 = *piVar255 + -1;
      UNLOCK();
      if (*piVar255 == 0) {
        if (local_8b0 == (Allocator *)0x0) {
          free((void *)local_8d0);
        }
        else {
          (*local_8b0->_vptr_Allocator[3])();
        }
      }
    }
    iVar189 = -100;
    if ((local_660 != (undefined1  [8])0x0) && ((long)iStack_628 * local_620 != 0))
    goto LAB_001bd57a;
  }
  piVar255 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
  if (piVar255 == (int *)0x0) {
    return iVar189;
  }
  LOCK();
  *piVar255 = *piVar255 + -1;
  UNLOCK();
  if (*piVar255 != 0) {
    return iVar189;
  }
  auVar230 = local_660;
  if (local_640 != (Allocator *)0x0) {
    (*local_640->_vptr_Allocator[3])();
    return iVar189;
  }
LAB_001c68b3:
  free((void *)auVar230);
  return iVar189;
}

Assistant:

int Convolution_x86_fma::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        Mat bottom_blob_3d;
        if (bottom_blob.elemsize % 16 == 0)
        {
            bottom_blob_3d = bottom_blob;
            bottom_blob_3d.dims = 3;
            bottom_blob_3d.w = 1;
            bottom_blob_3d.h = 1;
            bottom_blob_3d.c = bottom_blob.w;
            bottom_blob_3d.cstep = 1;
        }
        else
        {
            bottom_blob_3d = bottom_blob.reshape(1, 1, bottom_blob.w, opt.workspace_allocator);
            if (bottom_blob_3d.empty())
                return -100;
        }

        Mat top_blob_3d;
        int ret = forward(bottom_blob_3d, top_blob_3d, opt);
        if (ret != 0)
            return ret;

        if (top_blob_3d.elemsize % 16 == 0)
        {
            top_blob = top_blob_3d;
            top_blob.dims = 1;
            top_blob.w = top_blob_3d.c;
            top_blob.h = 1;
            top_blob.c = 1;
            bottom_blob_3d.cstep = top_blob_3d.c;
        }
        else
        {
            top_blob = top_blob_3d.reshape(top_blob_3d.c, opt.blob_allocator);
            if (top_blob.empty())
                return -100;
        }

        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        if (outw >= dilation_w && outh >= dilation_h)
        {
            return forwardDilation_x86(bottom_blob_bordered, top_blob, opt);
        }
    }

    const int num_input = channels * elempack;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        bool prefer_winograd63 = test_prefer_winograd63(num_input, num_output, w, h);
        bool prefer_winograd23 = test_prefer_winograd23(num_input, num_output, w, h);
        bool prefer_winograd43 = !prefer_winograd63 && !prefer_winograd23;

        if (prefer_winograd23 && (!opt.use_winograd23_convolution || weight_winograd23_data.empty()))
        {
            // f23 fallback to f43
            prefer_winograd23 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd63 && (!opt.use_winograd63_convolution || weight_winograd63_data.empty()))
        {
            // f63 fallback to f43
            prefer_winograd63 = false;
            prefer_winograd43 = true;
        }

        if (prefer_winograd43 && (!opt.use_winograd43_convolution || weight_winograd43_data.empty()))
        {
            // f43 fallback to f63 or f23
            prefer_winograd43 = false;
            if (opt.use_winograd63_convolution && !weight_winograd63_data.empty())
            {
                prefer_winograd63 = true;
            }
            else
            {
                prefer_winograd23 = true;
            }
        }

        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution winograd will use load-time value %d", opt.num_threads, nT);
        }

        int ret = 0;
        if (prefer_winograd23)
        {
            ret = conv3x3s1_winograd23(bottom_blob_bordered, top_blob, weight_winograd23_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd43)
        {
            ret = conv3x3s1_winograd43(bottom_blob_bordered, top_blob, weight_winograd43_data, bias_data, _nT, opt);
        }
        else if (prefer_winograd63)
        {
            ret = conv3x3s1_winograd63(bottom_blob_bordered, top_blob, weight_winograd63_data, bias_data, _nT, opt);
        }
        else
        {
            // should never reach here
        }
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

    int l2_cache_size = get_cpu_level2_cache_size();
    bool prefer_sgemm = num_input * num_output * kernel_w * kernel_h * dilation_w * dilation_h * stride_w * stride_h * (int)sizeof(float) * 2 > l2_cache_size || (num_input > 16 || num_output > 16);

    if ((opt.use_sgemm_convolution && prefer_sgemm) || (kernel_w == 1 && kernel_h == 1))
    {
        int _nT = nT ? nT : opt.num_threads;
        if (nT != 0 && opt.num_threads != nT)
        {
            // force num_threads the same as in create_pipeline
            // so we could use pre-packed A/B from the same tile config
            NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
        }

        int ret = convolution_im2col_gemm(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
        if (ret != 0)
            return ret;

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
        return 0;
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack16to1_avx512(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX512F__

    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv2x2s1_pack8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to8_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack8to1_avx(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __AVX__

    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
            return 0;
        }
    }
#endif // __SSE2__

    convolution_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);

    return 0;
}